

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256_sse41.cpp
# Opt level: O0

void sha256d64_sse41::Transform_4way(uchar *out,uchar *in)

{
  undefined4 *puVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Da_25;
  undefined4 extraout_XMM0_Da_26;
  undefined4 extraout_XMM0_Da_27;
  undefined4 extraout_XMM0_Da_28;
  undefined4 extraout_XMM0_Da_29;
  undefined4 extraout_XMM0_Da_30;
  undefined4 extraout_XMM0_Da_31;
  undefined4 extraout_XMM0_Da_32;
  undefined4 extraout_XMM0_Da_33;
  undefined4 extraout_XMM0_Da_34;
  undefined4 extraout_XMM0_Da_35;
  undefined4 extraout_XMM0_Da_36;
  undefined4 extraout_XMM0_Da_37;
  undefined4 extraout_XMM0_Da_38;
  undefined4 extraout_XMM0_Da_39;
  undefined4 extraout_XMM0_Da_40;
  undefined4 extraout_XMM0_Da_41;
  undefined4 extraout_XMM0_Da_42;
  undefined4 extraout_XMM0_Da_43;
  undefined4 extraout_XMM0_Da_44;
  undefined4 extraout_XMM0_Da_45;
  undefined4 extraout_XMM0_Da_46;
  undefined4 extraout_XMM0_Da_47;
  undefined4 extraout_XMM0_Da_48;
  undefined4 extraout_XMM0_Da_49;
  undefined4 extraout_XMM0_Da_50;
  undefined4 extraout_XMM0_Da_51;
  undefined4 extraout_XMM0_Da_52;
  undefined4 extraout_XMM0_Da_53;
  undefined4 extraout_XMM0_Da_54;
  undefined4 extraout_XMM0_Da_55;
  undefined4 extraout_XMM0_Da_56;
  undefined4 extraout_XMM0_Da_57;
  undefined4 extraout_XMM0_Da_58;
  undefined4 extraout_XMM0_Da_59;
  undefined4 extraout_XMM0_Da_60;
  undefined4 extraout_XMM0_Da_61;
  undefined4 extraout_XMM0_Da_62;
  undefined4 extraout_XMM0_Da_63;
  undefined4 extraout_XMM0_Da_64;
  undefined4 extraout_XMM0_Da_65;
  undefined4 extraout_XMM0_Da_66;
  undefined4 extraout_XMM0_Da_67;
  undefined4 extraout_XMM0_Da_68;
  undefined4 extraout_XMM0_Da_69;
  undefined4 extraout_XMM0_Da_70;
  undefined4 extraout_XMM0_Da_71;
  undefined4 extraout_XMM0_Da_72;
  undefined4 extraout_XMM0_Da_73;
  undefined4 extraout_XMM0_Da_74;
  undefined4 extraout_XMM0_Da_75;
  undefined4 extraout_XMM0_Da_76;
  undefined4 extraout_XMM0_Da_77;
  undefined4 extraout_XMM0_Da_78;
  undefined4 extraout_XMM0_Da_79;
  undefined4 extraout_XMM0_Da_80;
  undefined4 extraout_XMM0_Da_81;
  undefined4 extraout_XMM0_Da_82;
  undefined4 extraout_XMM0_Da_83;
  undefined4 extraout_XMM0_Da_84;
  undefined4 extraout_XMM0_Da_85;
  undefined4 extraout_XMM0_Da_86;
  undefined4 extraout_XMM0_Da_87;
  undefined4 extraout_XMM0_Da_88;
  undefined4 extraout_XMM0_Da_89;
  undefined4 extraout_XMM0_Da_90;
  undefined4 extraout_XMM0_Da_91;
  undefined4 extraout_XMM0_Da_92;
  undefined4 extraout_XMM0_Da_93;
  undefined4 extraout_XMM0_Da_94;
  undefined4 extraout_XMM0_Da_95;
  undefined4 extraout_XMM0_Da_96;
  undefined4 extraout_XMM0_Da_97;
  undefined4 extraout_XMM0_Da_98;
  undefined4 extraout_XMM0_Da_99;
  undefined4 extraout_XMM0_Da_x00100;
  undefined4 extraout_XMM0_Da_x00101;
  undefined4 extraout_XMM0_Da_x00102;
  undefined4 extraout_XMM0_Da_x00103;
  undefined4 extraout_XMM0_Da_x00104;
  undefined4 extraout_XMM0_Da_x00105;
  undefined4 extraout_XMM0_Da_x00106;
  undefined4 extraout_XMM0_Da_x00107;
  undefined4 extraout_XMM0_Da_x00108;
  undefined4 extraout_XMM0_Da_x00109;
  undefined4 extraout_XMM0_Da_x00110;
  undefined4 extraout_XMM0_Da_x00111;
  undefined4 extraout_XMM0_Da_x00112;
  undefined4 extraout_XMM0_Da_x00113;
  undefined4 extraout_XMM0_Da_x00114;
  undefined4 extraout_XMM0_Da_x00115;
  undefined4 extraout_XMM0_Da_x00116;
  undefined4 extraout_XMM0_Da_x00117;
  undefined4 extraout_XMM0_Da_x00118;
  undefined4 extraout_XMM0_Da_x00119;
  undefined4 extraout_XMM0_Da_x00120;
  undefined4 extraout_XMM0_Da_x00121;
  undefined4 extraout_XMM0_Da_x00122;
  undefined4 extraout_XMM0_Da_x00123;
  undefined4 extraout_XMM0_Da_x00124;
  undefined4 extraout_XMM0_Da_x00125;
  undefined4 extraout_XMM0_Da_x00126;
  undefined4 extraout_XMM0_Da_x00127;
  undefined4 extraout_XMM0_Da_x00128;
  undefined4 extraout_XMM0_Da_x00129;
  undefined4 extraout_XMM0_Da_x00130;
  undefined4 extraout_XMM0_Da_x00131;
  undefined4 extraout_XMM0_Da_x00132;
  undefined4 extraout_XMM0_Da_x00133;
  undefined4 extraout_XMM0_Da_x00134;
  undefined4 extraout_XMM0_Da_x00135;
  undefined4 extraout_XMM0_Da_x00136;
  undefined4 extraout_XMM0_Da_x00137;
  undefined4 extraout_XMM0_Da_x00138;
  undefined4 extraout_XMM0_Da_x00139;
  undefined4 extraout_XMM0_Da_x00140;
  undefined4 extraout_XMM0_Da_x00141;
  undefined4 extraout_XMM0_Da_x00142;
  undefined4 extraout_XMM0_Da_x00143;
  undefined4 extraout_XMM0_Da_x00144;
  undefined4 extraout_XMM0_Da_x00145;
  undefined4 extraout_XMM0_Da_x00146;
  undefined4 extraout_XMM0_Da_x00147;
  undefined4 extraout_XMM0_Da_x00148;
  undefined4 extraout_XMM0_Da_x00149;
  undefined4 extraout_XMM0_Da_x00150;
  undefined4 extraout_XMM0_Da_x00151;
  undefined4 extraout_XMM0_Da_x00152;
  undefined4 extraout_XMM0_Da_x00153;
  undefined4 extraout_XMM0_Da_x00154;
  undefined4 extraout_XMM0_Da_x00155;
  undefined4 extraout_XMM0_Da_x00156;
  undefined4 extraout_XMM0_Da_x00157;
  undefined4 extraout_XMM0_Da_x00158;
  undefined4 extraout_XMM0_Da_x00159;
  undefined4 extraout_XMM0_Da_x00160;
  undefined4 extraout_XMM0_Da_x00161;
  undefined4 extraout_XMM0_Da_x00162;
  undefined4 extraout_XMM0_Da_x00163;
  undefined4 extraout_XMM0_Da_x00164;
  undefined4 extraout_XMM0_Da_x00165;
  undefined4 extraout_XMM0_Da_x00166;
  undefined4 extraout_XMM0_Da_x00167;
  undefined4 extraout_XMM0_Da_x00168;
  undefined4 extraout_XMM0_Da_x00169;
  undefined4 extraout_XMM0_Da_x00170;
  undefined4 extraout_XMM0_Da_x00171;
  undefined4 extraout_XMM0_Da_x00172;
  undefined4 extraout_XMM0_Da_x00173;
  undefined4 extraout_XMM0_Da_x00174;
  undefined4 extraout_XMM0_Da_x00175;
  undefined4 extraout_XMM0_Da_x00176;
  undefined4 extraout_XMM0_Da_x00177;
  undefined4 extraout_XMM0_Da_x00178;
  undefined4 extraout_XMM0_Da_x00179;
  undefined4 extraout_XMM0_Da_x00180;
  undefined4 extraout_XMM0_Da_x00181;
  undefined4 extraout_XMM0_Da_x00182;
  undefined4 extraout_XMM0_Da_x00183;
  undefined4 extraout_XMM0_Da_x00184;
  undefined4 extraout_XMM0_Da_x00185;
  undefined4 extraout_XMM0_Da_x00186;
  undefined4 extraout_XMM0_Da_x00187;
  undefined4 extraout_XMM0_Da_x00188;
  undefined4 extraout_XMM0_Da_x00189;
  undefined4 extraout_XMM0_Da_x00190;
  undefined4 extraout_XMM0_Da_x00191;
  undefined4 extraout_XMM0_Da_x00192;
  undefined4 extraout_XMM0_Da_x00193;
  undefined4 extraout_XMM0_Da_x00194;
  undefined4 extraout_XMM0_Da_x00195;
  undefined4 extraout_XMM0_Da_x00196;
  undefined4 extraout_XMM0_Da_x00197;
  undefined4 extraout_XMM0_Da_x00198;
  undefined4 extraout_XMM0_Da_x00199;
  undefined4 extraout_XMM0_Da_x00200;
  undefined4 extraout_XMM0_Da_x00201;
  undefined4 extraout_XMM0_Da_x00202;
  undefined4 extraout_XMM0_Da_x00203;
  undefined4 extraout_XMM0_Da_x00204;
  undefined4 extraout_XMM0_Da_x00205;
  undefined4 extraout_XMM0_Da_x00206;
  undefined4 extraout_XMM0_Da_x00207;
  undefined4 extraout_XMM0_Da_x00208;
  undefined4 extraout_XMM0_Da_x00209;
  undefined4 extraout_XMM0_Da_x00210;
  undefined4 extraout_XMM0_Da_x00211;
  undefined4 extraout_XMM0_Da_x00212;
  undefined4 extraout_XMM0_Da_x00213;
  undefined4 extraout_XMM0_Da_x00214;
  undefined4 extraout_XMM0_Da_x00215;
  undefined4 extraout_XMM0_Da_x00216;
  undefined4 extraout_XMM0_Da_x00217;
  undefined4 extraout_XMM0_Da_x00218;
  undefined4 extraout_XMM0_Da_x00219;
  undefined4 extraout_XMM0_Da_x00220;
  undefined4 extraout_XMM0_Da_x00221;
  undefined4 extraout_XMM0_Da_x00222;
  undefined4 extraout_XMM0_Da_x00223;
  undefined4 extraout_XMM0_Da_x00224;
  undefined4 extraout_XMM0_Da_x00225;
  undefined4 extraout_XMM0_Da_x00226;
  undefined4 extraout_XMM0_Da_x00227;
  undefined4 extraout_XMM0_Da_x00228;
  undefined4 extraout_XMM0_Da_x00229;
  undefined4 extraout_XMM0_Da_x00230;
  undefined4 extraout_XMM0_Da_x00231;
  undefined4 extraout_XMM0_Da_x00232;
  undefined4 extraout_XMM0_Da_x00233;
  undefined4 extraout_XMM0_Da_x00234;
  undefined4 extraout_XMM0_Da_x00235;
  undefined4 extraout_XMM0_Da_x00236;
  undefined4 extraout_XMM0_Da_x00237;
  undefined4 extraout_XMM0_Da_x00238;
  undefined4 extraout_XMM0_Da_x00239;
  undefined4 extraout_XMM0_Da_x00240;
  undefined4 extraout_XMM0_Da_x00241;
  undefined4 extraout_XMM0_Da_x00242;
  undefined4 extraout_XMM0_Da_x00243;
  undefined4 extraout_XMM0_Da_x00244;
  undefined4 extraout_XMM0_Da_x00245;
  undefined4 extraout_XMM0_Da_x00246;
  undefined4 extraout_XMM0_Da_x00247;
  undefined4 extraout_XMM0_Da_x00248;
  undefined4 extraout_XMM0_Da_x00249;
  undefined4 extraout_XMM0_Da_x00250;
  undefined4 extraout_XMM0_Da_x00251;
  undefined4 extraout_XMM0_Da_x00252;
  undefined4 extraout_XMM0_Da_x00253;
  undefined4 extraout_XMM0_Da_x00254;
  undefined4 extraout_XMM0_Da_x00255;
  undefined4 extraout_XMM0_Da_x00256;
  undefined4 extraout_XMM0_Da_x00257;
  undefined4 extraout_XMM0_Da_x00258;
  undefined4 extraout_XMM0_Da_x00259;
  undefined4 extraout_XMM0_Da_x00260;
  undefined4 extraout_XMM0_Da_x00261;
  undefined4 extraout_XMM0_Da_x00262;
  undefined4 extraout_XMM0_Da_x00263;
  undefined4 extraout_XMM0_Da_x00264;
  undefined4 extraout_XMM0_Da_x00265;
  undefined4 extraout_XMM0_Da_x00266;
  undefined4 extraout_XMM0_Da_x00267;
  undefined4 extraout_XMM0_Da_x00268;
  undefined4 extraout_XMM0_Da_x00269;
  undefined4 extraout_XMM0_Da_x00270;
  undefined4 extraout_XMM0_Da_x00271;
  undefined4 extraout_XMM0_Da_x00272;
  undefined4 extraout_XMM0_Da_x00273;
  undefined4 extraout_XMM0_Da_x00274;
  undefined4 extraout_XMM0_Da_x00275;
  undefined4 extraout_XMM0_Da_x00276;
  undefined4 extraout_XMM0_Da_x00277;
  undefined4 extraout_XMM0_Da_x00278;
  undefined4 extraout_XMM0_Da_x00279;
  undefined4 extraout_XMM0_Da_x00280;
  undefined4 extraout_XMM0_Da_x00281;
  undefined4 extraout_XMM0_Da_x00282;
  undefined4 extraout_XMM0_Da_x00283;
  undefined4 extraout_XMM0_Da_x00284;
  undefined4 extraout_XMM0_Da_x00285;
  undefined4 extraout_XMM0_Da_x00286;
  undefined4 extraout_XMM0_Da_x00287;
  undefined4 extraout_XMM0_Da_x00288;
  undefined4 extraout_XMM0_Da_x00289;
  undefined4 extraout_XMM0_Da_x00290;
  undefined4 extraout_XMM0_Da_x00291;
  undefined4 extraout_XMM0_Da_x00292;
  undefined4 extraout_XMM0_Da_x00293;
  undefined4 extraout_XMM0_Da_x00294;
  undefined4 extraout_XMM0_Da_x00295;
  undefined4 extraout_XMM0_Da_x00296;
  undefined4 extraout_XMM0_Da_x00297;
  undefined4 extraout_XMM0_Da_x00298;
  undefined4 extraout_XMM0_Da_x00299;
  undefined4 extraout_XMM0_Da_x00300;
  undefined4 extraout_XMM0_Da_x00301;
  undefined4 extraout_XMM0_Da_x00302;
  undefined4 extraout_XMM0_Da_x00303;
  undefined4 extraout_XMM0_Da_x00304;
  undefined4 extraout_XMM0_Da_x00305;
  undefined4 extraout_XMM0_Da_x00306;
  undefined4 extraout_XMM0_Da_x00307;
  undefined4 extraout_XMM0_Da_x00308;
  undefined4 extraout_XMM0_Da_x00309;
  undefined4 extraout_XMM0_Da_x00310;
  undefined4 extraout_XMM0_Da_x00311;
  undefined4 extraout_XMM0_Da_x00312;
  undefined4 extraout_XMM0_Da_x00313;
  undefined4 extraout_XMM0_Da_x00314;
  undefined4 extraout_XMM0_Da_x00315;
  undefined4 extraout_XMM0_Da_x00316;
  undefined4 extraout_XMM0_Da_x00317;
  undefined4 extraout_XMM0_Da_x00318;
  undefined4 extraout_XMM0_Da_x00319;
  undefined4 extraout_XMM0_Da_x00320;
  undefined4 extraout_XMM0_Da_x00321;
  undefined4 extraout_XMM0_Da_x00322;
  undefined4 extraout_XMM0_Da_x00323;
  undefined4 extraout_XMM0_Da_x00324;
  undefined4 extraout_XMM0_Da_x00325;
  undefined4 extraout_XMM0_Da_x00326;
  undefined4 extraout_XMM0_Da_x00327;
  undefined4 extraout_XMM0_Da_x00328;
  undefined4 extraout_XMM0_Da_x00329;
  undefined4 extraout_XMM0_Da_x00330;
  undefined4 extraout_XMM0_Da_x00331;
  undefined4 extraout_XMM0_Da_x00332;
  undefined4 extraout_XMM0_Da_x00333;
  undefined4 extraout_XMM0_Da_x00334;
  undefined4 extraout_XMM0_Da_x00335;
  undefined4 extraout_XMM0_Da_x00336;
  undefined4 extraout_XMM0_Da_x00337;
  undefined4 extraout_XMM0_Da_x00338;
  undefined4 extraout_XMM0_Da_x00339;
  undefined4 extraout_XMM0_Da_x00340;
  undefined4 extraout_XMM0_Da_x00341;
  undefined4 extraout_XMM0_Da_x00342;
  undefined4 extraout_XMM0_Da_x00343;
  undefined4 extraout_XMM0_Da_x00344;
  undefined4 extraout_XMM0_Da_x00345;
  undefined4 extraout_XMM0_Da_x00346;
  undefined4 extraout_XMM0_Da_x00347;
  undefined4 extraout_XMM0_Da_x00348;
  undefined4 extraout_XMM0_Da_x00349;
  undefined4 extraout_XMM0_Da_x00350;
  undefined4 extraout_XMM0_Da_x00351;
  undefined4 extraout_XMM0_Da_x00352;
  undefined4 extraout_XMM0_Da_x00353;
  undefined4 extraout_XMM0_Da_x00354;
  undefined4 extraout_XMM0_Da_x00355;
  undefined4 extraout_XMM0_Da_x00356;
  undefined4 extraout_XMM0_Da_x00357;
  undefined4 extraout_XMM0_Da_x00358;
  undefined4 extraout_XMM0_Da_x00359;
  undefined4 extraout_XMM0_Da_x00360;
  undefined4 extraout_XMM0_Da_x00361;
  undefined4 extraout_XMM0_Da_x00362;
  undefined4 extraout_XMM0_Da_x00363;
  undefined4 extraout_XMM0_Da_x00364;
  undefined4 extraout_XMM0_Da_x00365;
  undefined4 extraout_XMM0_Da_x00366;
  undefined4 extraout_XMM0_Da_x00367;
  undefined4 extraout_XMM0_Da_x00368;
  undefined4 extraout_XMM0_Da_x00369;
  undefined4 extraout_XMM0_Da_x00370;
  undefined4 extraout_XMM0_Da_x00371;
  undefined4 extraout_XMM0_Da_x00372;
  undefined4 extraout_XMM0_Da_x00373;
  undefined4 extraout_XMM0_Da_x00374;
  undefined4 extraout_XMM0_Da_x00375;
  undefined4 extraout_XMM0_Da_x00376;
  undefined4 extraout_XMM0_Da_x00377;
  undefined4 extraout_XMM0_Da_x00378;
  undefined4 extraout_XMM0_Da_x00379;
  undefined4 extraout_XMM0_Da_x00380;
  undefined4 extraout_XMM0_Da_x00381;
  undefined4 extraout_XMM0_Da_x00382;
  undefined4 extraout_XMM0_Da_x00383;
  undefined4 extraout_XMM0_Da_x00384;
  undefined4 extraout_XMM0_Da_x00385;
  undefined4 extraout_XMM0_Da_x00386;
  undefined4 extraout_XMM0_Da_x00387;
  undefined4 extraout_XMM0_Da_x00388;
  undefined4 extraout_XMM0_Da_x00389;
  undefined4 extraout_XMM0_Da_x00390;
  undefined4 extraout_XMM0_Da_x00391;
  undefined4 extraout_XMM0_Da_x00392;
  undefined4 extraout_XMM0_Da_x00393;
  undefined4 extraout_XMM0_Da_x00394;
  undefined4 extraout_XMM0_Da_x00395;
  undefined4 extraout_XMM0_Da_x00396;
  undefined4 extraout_XMM0_Da_x00397;
  undefined4 extraout_XMM0_Da_x00398;
  undefined4 extraout_XMM0_Da_x00399;
  undefined4 extraout_XMM0_Da_x00400;
  undefined4 extraout_XMM0_Da_x00401;
  undefined4 extraout_XMM0_Da_x00402;
  undefined4 extraout_XMM0_Da_x00403;
  undefined4 extraout_XMM0_Da_x00404;
  undefined4 extraout_XMM0_Da_x00405;
  undefined4 extraout_XMM0_Da_x00406;
  undefined4 extraout_XMM0_Da_x00407;
  undefined4 extraout_XMM0_Da_x00408;
  undefined4 extraout_XMM0_Da_x00409;
  undefined4 extraout_XMM0_Da_x00410;
  undefined4 extraout_XMM0_Da_x00411;
  undefined4 extraout_XMM0_Da_x00412;
  undefined4 extraout_XMM0_Da_x00413;
  undefined4 extraout_XMM0_Da_x00414;
  undefined4 extraout_XMM0_Da_x00415;
  undefined4 extraout_XMM0_Da_x00416;
  undefined4 extraout_XMM0_Da_x00417;
  undefined4 extraout_XMM0_Da_x00418;
  undefined4 extraout_XMM0_Da_x00419;
  undefined4 extraout_XMM0_Da_x00420;
  undefined4 extraout_XMM0_Da_x00421;
  undefined4 extraout_XMM0_Da_x00422;
  undefined4 extraout_XMM0_Da_x00423;
  undefined4 extraout_XMM0_Da_x00424;
  undefined4 extraout_XMM0_Da_x00425;
  undefined4 extraout_XMM0_Da_x00426;
  undefined4 extraout_XMM0_Da_x00427;
  undefined4 extraout_XMM0_Da_x00428;
  undefined4 extraout_XMM0_Da_x00429;
  undefined4 extraout_XMM0_Da_x00430;
  undefined4 extraout_XMM0_Da_x00431;
  undefined4 extraout_XMM0_Da_x00432;
  undefined4 extraout_XMM0_Da_x00433;
  undefined4 extraout_XMM0_Da_x00434;
  undefined4 extraout_XMM0_Da_x00435;
  undefined4 extraout_XMM0_Da_x00436;
  undefined4 extraout_XMM0_Da_x00437;
  undefined4 extraout_XMM0_Da_x00438;
  undefined4 extraout_XMM0_Da_x00439;
  undefined4 extraout_XMM0_Da_x00440;
  undefined4 extraout_XMM0_Da_x00441;
  undefined4 extraout_XMM0_Da_x00442;
  undefined4 extraout_XMM0_Da_x00443;
  undefined4 extraout_XMM0_Da_x00444;
  undefined4 extraout_XMM0_Da_x00445;
  undefined4 extraout_XMM0_Da_x00446;
  undefined4 extraout_XMM0_Da_x00447;
  undefined4 extraout_XMM0_Da_x00448;
  undefined4 extraout_XMM0_Da_x00449;
  undefined4 extraout_XMM0_Da_x00450;
  undefined4 extraout_XMM0_Da_x00451;
  undefined4 extraout_XMM0_Da_x00452;
  undefined4 extraout_XMM0_Da_x00453;
  undefined4 extraout_XMM0_Da_x00454;
  undefined4 extraout_XMM0_Da_x00455;
  undefined4 extraout_XMM0_Da_x00456;
  undefined4 extraout_XMM0_Da_x00457;
  undefined4 extraout_XMM0_Da_x00458;
  undefined4 extraout_XMM0_Da_x00459;
  undefined4 extraout_XMM0_Da_x00460;
  undefined4 extraout_XMM0_Da_x00461;
  undefined4 extraout_XMM0_Da_x00462;
  undefined4 extraout_XMM0_Da_x00463;
  undefined4 extraout_XMM0_Da_x00464;
  undefined4 extraout_XMM0_Da_x00465;
  undefined4 extraout_XMM0_Da_x00466;
  undefined4 extraout_XMM0_Da_x00467;
  undefined4 extraout_XMM0_Da_x00468;
  undefined4 extraout_XMM0_Da_x00469;
  undefined4 extraout_XMM0_Da_x00470;
  undefined4 extraout_XMM0_Da_x00471;
  undefined4 extraout_XMM0_Da_x00472;
  undefined4 extraout_XMM0_Da_x00473;
  undefined4 extraout_XMM0_Da_x00474;
  undefined4 extraout_XMM0_Da_x00475;
  undefined4 extraout_XMM0_Da_x00476;
  undefined4 extraout_XMM0_Da_x00477;
  undefined4 extraout_XMM0_Da_x00478;
  undefined4 extraout_XMM0_Da_x00479;
  undefined4 extraout_XMM0_Da_x00480;
  undefined4 extraout_XMM0_Da_x00481;
  undefined4 extraout_XMM0_Da_x00482;
  undefined4 extraout_XMM0_Da_x00483;
  undefined4 extraout_XMM0_Da_x00484;
  undefined4 extraout_XMM0_Da_x00485;
  undefined4 extraout_XMM0_Da_x00486;
  undefined4 extraout_XMM0_Da_x00487;
  undefined4 extraout_XMM0_Da_x00488;
  undefined4 extraout_XMM0_Da_x00489;
  undefined4 extraout_XMM0_Da_x00490;
  undefined4 extraout_XMM0_Da_x00491;
  undefined4 extraout_XMM0_Da_x00492;
  undefined4 extraout_XMM0_Da_x00493;
  undefined4 extraout_XMM0_Da_x00494;
  undefined4 extraout_XMM0_Da_x00495;
  undefined4 extraout_XMM0_Da_x00496;
  undefined4 extraout_XMM0_Da_x00497;
  undefined4 extraout_XMM0_Da_x00498;
  undefined4 extraout_XMM0_Da_x00499;
  undefined4 extraout_XMM0_Da_x00500;
  undefined4 extraout_XMM0_Da_x00501;
  undefined4 extraout_XMM0_Da_x00502;
  undefined4 extraout_XMM0_Da_x00503;
  undefined4 extraout_XMM0_Da_x00504;
  undefined4 extraout_XMM0_Da_x00505;
  undefined4 extraout_XMM0_Da_x00506;
  undefined4 extraout_XMM0_Da_x00507;
  undefined4 extraout_XMM0_Da_x00508;
  undefined4 extraout_XMM0_Da_x00509;
  undefined4 extraout_XMM0_Da_x00510;
  undefined4 extraout_XMM0_Da_x00511;
  undefined4 extraout_XMM0_Da_x00512;
  undefined4 extraout_XMM0_Da_x00513;
  undefined4 extraout_XMM0_Da_x00514;
  undefined4 extraout_XMM0_Da_x00515;
  undefined4 extraout_XMM0_Da_x00516;
  undefined4 extraout_XMM0_Da_x00517;
  undefined4 extraout_XMM0_Da_x00518;
  undefined4 extraout_XMM0_Da_x00519;
  undefined4 extraout_XMM0_Da_x00520;
  undefined4 extraout_XMM0_Da_x00521;
  undefined4 extraout_XMM0_Da_x00522;
  undefined4 extraout_XMM0_Da_x00523;
  undefined4 extraout_XMM0_Da_x00524;
  undefined4 extraout_XMM0_Da_x00525;
  undefined4 extraout_XMM0_Da_x00526;
  undefined4 extraout_XMM0_Da_x00527;
  undefined4 extraout_XMM0_Da_x00528;
  undefined4 extraout_XMM0_Da_x00529;
  undefined4 extraout_XMM0_Da_x00530;
  undefined4 extraout_XMM0_Da_x00531;
  undefined4 extraout_XMM0_Da_x00532;
  undefined4 extraout_XMM0_Da_x00533;
  undefined4 extraout_XMM0_Da_x00534;
  undefined4 extraout_XMM0_Da_x00535;
  undefined4 extraout_XMM0_Da_x00536;
  undefined4 extraout_XMM0_Da_x00537;
  undefined4 extraout_XMM0_Da_x00538;
  undefined4 extraout_XMM0_Da_x00539;
  undefined4 extraout_XMM0_Da_x00540;
  undefined4 extraout_XMM0_Da_x00541;
  undefined4 extraout_XMM0_Da_x00542;
  undefined4 extraout_XMM0_Da_x00543;
  undefined4 extraout_XMM0_Da_x00544;
  undefined4 extraout_XMM0_Da_x00545;
  undefined4 extraout_XMM0_Da_x00546;
  undefined4 extraout_XMM0_Da_x00547;
  undefined4 extraout_XMM0_Da_x00548;
  undefined4 extraout_XMM0_Da_x00549;
  undefined4 extraout_XMM0_Da_x00550;
  undefined4 extraout_XMM0_Da_x00551;
  undefined4 extraout_XMM0_Da_x00552;
  undefined4 extraout_XMM0_Da_x00553;
  undefined4 extraout_XMM0_Da_x00554;
  undefined4 extraout_XMM0_Da_x00555;
  undefined4 extraout_XMM0_Da_x00556;
  undefined4 extraout_XMM0_Da_x00557;
  undefined4 extraout_XMM0_Da_x00558;
  undefined4 extraout_XMM0_Da_x00559;
  undefined4 extraout_XMM0_Da_x00560;
  undefined4 extraout_XMM0_Da_x00561;
  undefined4 extraout_XMM0_Da_x00562;
  undefined4 extraout_XMM0_Da_x00563;
  undefined4 extraout_XMM0_Da_x00564;
  undefined4 extraout_XMM0_Da_x00565;
  undefined4 extraout_XMM0_Da_x00566;
  undefined4 extraout_XMM0_Da_x00567;
  undefined4 extraout_XMM0_Da_x00568;
  undefined4 extraout_XMM0_Da_x00569;
  undefined4 extraout_XMM0_Da_x00570;
  undefined4 extraout_XMM0_Da_x00571;
  undefined4 extraout_XMM0_Da_x00572;
  undefined4 extraout_XMM0_Da_x00573;
  undefined4 extraout_XMM0_Da_x00574;
  undefined4 extraout_XMM0_Da_x00575;
  undefined4 extraout_XMM0_Da_x00576;
  undefined4 extraout_XMM0_Da_x00577;
  undefined4 extraout_XMM0_Da_x00578;
  undefined4 extraout_XMM0_Da_x00579;
  undefined4 extraout_XMM0_Da_x00580;
  undefined4 extraout_XMM0_Da_x00581;
  undefined4 extraout_XMM0_Da_x00582;
  undefined4 extraout_XMM0_Da_x00583;
  undefined4 extraout_XMM0_Da_x00584;
  undefined4 extraout_XMM0_Da_x00585;
  undefined4 extraout_XMM0_Da_x00586;
  undefined4 extraout_XMM0_Da_x00587;
  undefined4 extraout_XMM0_Da_x00588;
  undefined4 extraout_XMM0_Da_x00589;
  undefined4 extraout_XMM0_Da_x00590;
  undefined4 extraout_XMM0_Da_x00591;
  undefined4 extraout_XMM0_Da_x00592;
  undefined4 extraout_XMM0_Da_x00593;
  undefined4 extraout_XMM0_Da_x00594;
  undefined4 extraout_XMM0_Da_x00595;
  undefined4 extraout_XMM0_Da_x00596;
  undefined4 extraout_XMM0_Da_x00597;
  undefined4 extraout_XMM0_Da_x00598;
  undefined4 extraout_XMM0_Da_x00599;
  undefined4 extraout_XMM0_Da_x00600;
  undefined4 extraout_XMM0_Da_x00601;
  undefined4 extraout_XMM0_Da_x00602;
  undefined4 extraout_XMM0_Da_x00603;
  undefined4 extraout_XMM0_Da_x00604;
  undefined4 extraout_XMM0_Da_x00605;
  undefined4 extraout_XMM0_Da_x00606;
  undefined4 extraout_XMM0_Da_x00607;
  undefined4 extraout_XMM0_Da_x00608;
  undefined4 extraout_XMM0_Da_x00609;
  undefined4 extraout_XMM0_Da_x00610;
  undefined4 extraout_XMM0_Da_x00611;
  undefined4 extraout_XMM0_Da_x00612;
  undefined4 extraout_XMM0_Da_x00613;
  undefined4 extraout_XMM0_Da_x00614;
  undefined4 extraout_XMM0_Da_x00615;
  undefined4 extraout_XMM0_Da_x00616;
  undefined4 extraout_XMM0_Da_x00617;
  undefined4 extraout_XMM0_Da_x00618;
  undefined4 extraout_XMM0_Da_x00619;
  undefined4 extraout_XMM0_Da_x00620;
  undefined4 extraout_XMM0_Da_x00621;
  undefined4 extraout_XMM0_Da_x00622;
  undefined4 extraout_XMM0_Da_x00623;
  undefined4 extraout_XMM0_Da_x00624;
  undefined4 extraout_XMM0_Da_x00625;
  undefined4 extraout_XMM0_Da_x00626;
  undefined4 extraout_XMM0_Da_x00627;
  undefined4 extraout_XMM0_Da_x00628;
  undefined4 extraout_XMM0_Da_x00629;
  undefined4 extraout_XMM0_Da_x00630;
  undefined4 extraout_XMM0_Da_x00631;
  undefined4 extraout_XMM0_Da_x00632;
  undefined4 extraout_XMM0_Da_x00633;
  undefined4 extraout_XMM0_Da_x00634;
  undefined4 extraout_XMM0_Da_x00635;
  undefined4 extraout_XMM0_Da_x00636;
  undefined4 extraout_XMM0_Da_x00637;
  undefined4 extraout_XMM0_Da_x00638;
  undefined4 extraout_XMM0_Da_x00639;
  undefined4 extraout_XMM0_Da_x00640;
  undefined4 extraout_XMM0_Da_x00641;
  undefined4 extraout_XMM0_Da_x00642;
  undefined4 extraout_XMM0_Da_x00643;
  undefined4 extraout_XMM0_Da_x00644;
  undefined4 extraout_XMM0_Da_x00645;
  undefined4 extraout_XMM0_Da_x00646;
  undefined4 extraout_XMM0_Da_x00647;
  undefined4 extraout_XMM0_Da_x00648;
  undefined4 extraout_XMM0_Da_x00649;
  undefined4 extraout_XMM0_Da_x00650;
  undefined4 extraout_XMM0_Da_x00651;
  undefined4 extraout_XMM0_Da_x00652;
  undefined4 extraout_XMM0_Da_x00653;
  undefined4 extraout_XMM0_Da_x00654;
  undefined4 extraout_XMM0_Da_x00655;
  undefined4 extraout_XMM0_Da_x00656;
  undefined4 extraout_XMM0_Da_x00657;
  undefined4 extraout_XMM0_Da_x00658;
  undefined4 extraout_XMM0_Da_x00659;
  undefined4 extraout_XMM0_Da_x00660;
  undefined4 extraout_XMM0_Da_x00661;
  undefined4 extraout_XMM0_Da_x00662;
  undefined4 extraout_XMM0_Da_x00663;
  undefined4 extraout_XMM0_Da_x00664;
  undefined4 extraout_XMM0_Da_x00665;
  undefined4 extraout_XMM0_Da_x00666;
  undefined4 extraout_XMM0_Da_x00667;
  undefined4 extraout_XMM0_Da_x00668;
  undefined4 extraout_XMM0_Da_x00669;
  undefined4 extraout_XMM0_Da_x00670;
  undefined4 extraout_XMM0_Da_x00671;
  undefined4 extraout_XMM0_Da_x00672;
  undefined4 extraout_XMM0_Da_x00673;
  undefined4 extraout_XMM0_Da_x00674;
  undefined4 extraout_XMM0_Da_x00675;
  undefined4 extraout_XMM0_Da_x00676;
  undefined4 extraout_XMM0_Da_x00677;
  undefined4 extraout_XMM0_Da_x00678;
  undefined4 extraout_XMM0_Da_x00679;
  undefined4 extraout_XMM0_Da_x00680;
  undefined4 extraout_XMM0_Da_x00681;
  undefined4 extraout_XMM0_Da_x00682;
  undefined4 extraout_XMM0_Da_x00683;
  undefined4 extraout_XMM0_Da_x00684;
  undefined4 extraout_XMM0_Da_x00685;
  undefined4 extraout_XMM0_Da_x00686;
  undefined4 extraout_XMM0_Da_x00687;
  undefined4 extraout_XMM0_Da_x00688;
  undefined4 extraout_XMM0_Da_x00689;
  undefined4 extraout_XMM0_Da_x00690;
  undefined4 extraout_XMM0_Da_x00691;
  undefined4 extraout_XMM0_Da_x00692;
  undefined4 extraout_XMM0_Da_x00693;
  undefined4 extraout_XMM0_Da_x00694;
  undefined4 extraout_XMM0_Da_x00695;
  undefined4 extraout_XMM0_Da_x00696;
  undefined4 extraout_XMM0_Da_x00697;
  undefined4 extraout_XMM0_Da_x00698;
  undefined4 extraout_XMM0_Da_x00699;
  undefined4 extraout_XMM0_Da_x00700;
  undefined4 extraout_XMM0_Da_x00701;
  undefined4 extraout_XMM0_Da_x00702;
  undefined4 extraout_XMM0_Da_x00703;
  undefined4 extraout_XMM0_Da_x00704;
  undefined4 extraout_XMM0_Da_x00705;
  undefined4 extraout_XMM0_Da_x00706;
  undefined4 extraout_XMM0_Da_x00707;
  undefined4 extraout_XMM0_Da_x00708;
  undefined4 extraout_XMM0_Da_x00709;
  undefined4 extraout_XMM0_Da_x00710;
  undefined4 extraout_XMM0_Da_x00711;
  undefined4 extraout_XMM0_Da_x00712;
  undefined4 extraout_XMM0_Da_x00713;
  undefined4 extraout_XMM0_Da_x00714;
  undefined4 extraout_XMM0_Da_x00715;
  undefined4 extraout_XMM0_Da_x00716;
  undefined4 extraout_XMM0_Da_x00717;
  undefined4 extraout_XMM0_Da_x00718;
  undefined4 extraout_XMM0_Da_x00719;
  undefined4 extraout_XMM0_Da_x00720;
  undefined4 extraout_XMM0_Da_x00721;
  undefined4 extraout_XMM0_Da_x00722;
  undefined4 extraout_XMM0_Da_x00723;
  undefined4 extraout_XMM0_Da_x00724;
  undefined4 extraout_XMM0_Da_x00725;
  undefined4 extraout_XMM0_Da_x00726;
  undefined4 extraout_XMM0_Da_x00727;
  undefined4 extraout_XMM0_Da_x00728;
  undefined4 extraout_XMM0_Da_x00729;
  undefined4 extraout_XMM0_Da_x00730;
  undefined4 extraout_XMM0_Da_x00731;
  undefined4 extraout_XMM0_Da_x00732;
  undefined4 extraout_XMM0_Da_x00733;
  undefined4 extraout_XMM0_Da_x00734;
  undefined4 extraout_XMM0_Da_x00735;
  undefined4 extraout_XMM0_Da_x00736;
  undefined4 extraout_XMM0_Da_x00737;
  undefined4 extraout_XMM0_Da_x00738;
  undefined4 extraout_XMM0_Da_x00739;
  undefined4 extraout_XMM0_Da_x00740;
  undefined4 extraout_XMM0_Da_x00741;
  undefined4 extraout_XMM0_Da_x00742;
  undefined4 extraout_XMM0_Da_x00743;
  undefined4 extraout_XMM0_Da_x00744;
  undefined4 extraout_XMM0_Da_x00745;
  undefined4 extraout_XMM0_Da_x00746;
  undefined4 extraout_XMM0_Da_x00747;
  undefined4 extraout_XMM0_Da_x00748;
  undefined4 extraout_XMM0_Da_x00749;
  undefined4 extraout_XMM0_Da_x00750;
  undefined4 extraout_XMM0_Da_x00751;
  undefined4 extraout_XMM0_Da_x00752;
  undefined4 extraout_XMM0_Da_x00753;
  undefined4 extraout_XMM0_Da_x00754;
  undefined4 extraout_XMM0_Da_x00755;
  undefined4 extraout_XMM0_Da_x00756;
  undefined4 extraout_XMM0_Da_x00757;
  undefined4 extraout_XMM0_Da_x00758;
  undefined4 extraout_XMM0_Da_x00759;
  undefined4 extraout_XMM0_Da_x00760;
  undefined4 extraout_XMM0_Da_x00761;
  undefined4 extraout_XMM0_Da_x00762;
  undefined4 extraout_XMM0_Da_x00763;
  undefined4 extraout_XMM0_Da_x00764;
  undefined4 extraout_XMM0_Da_x00765;
  undefined4 extraout_XMM0_Da_x00766;
  undefined4 extraout_XMM0_Da_x00767;
  undefined4 extraout_XMM0_Da_x00768;
  undefined4 extraout_XMM0_Da_x00769;
  undefined4 extraout_XMM0_Da_x00770;
  undefined4 extraout_XMM0_Da_x00771;
  undefined4 extraout_XMM0_Da_x00772;
  undefined4 extraout_XMM0_Da_x00773;
  undefined4 extraout_XMM0_Da_x00774;
  undefined4 extraout_XMM0_Da_x00775;
  undefined4 extraout_XMM0_Da_x00776;
  undefined4 extraout_XMM0_Da_x00777;
  undefined4 extraout_XMM0_Da_x00778;
  undefined4 extraout_XMM0_Da_x00779;
  undefined4 extraout_XMM0_Da_x00780;
  undefined4 extraout_XMM0_Da_x00781;
  undefined4 extraout_XMM0_Da_x00782;
  undefined4 extraout_XMM0_Da_x00783;
  undefined4 extraout_XMM0_Da_x00784;
  undefined4 extraout_XMM0_Da_x00785;
  undefined4 extraout_XMM0_Da_x00786;
  undefined4 extraout_XMM0_Da_x00787;
  undefined4 extraout_XMM0_Da_x00788;
  undefined4 extraout_XMM0_Da_x00789;
  undefined4 extraout_XMM0_Da_x00790;
  undefined4 extraout_XMM0_Da_x00791;
  undefined4 extraout_XMM0_Da_x00792;
  undefined4 extraout_XMM0_Da_x00793;
  undefined4 extraout_XMM0_Da_x00794;
  undefined4 extraout_XMM0_Da_x00795;
  undefined4 extraout_XMM0_Da_x00796;
  undefined4 extraout_XMM0_Da_x00797;
  undefined4 extraout_XMM0_Da_x00798;
  undefined4 extraout_XMM0_Da_x00799;
  undefined4 extraout_XMM0_Da_x00800;
  undefined4 extraout_XMM0_Da_x00801;
  undefined4 extraout_XMM0_Da_x00802;
  undefined4 extraout_XMM0_Da_x00803;
  undefined4 extraout_XMM0_Da_x00804;
  undefined4 extraout_XMM0_Da_x00805;
  undefined4 extraout_XMM0_Da_x00806;
  undefined4 extraout_XMM0_Da_x00807;
  undefined4 extraout_XMM0_Da_x00808;
  undefined4 extraout_XMM0_Da_x00809;
  undefined4 extraout_XMM0_Da_x00810;
  undefined4 extraout_XMM0_Da_x00811;
  undefined4 extraout_XMM0_Da_x00812;
  undefined4 extraout_XMM0_Da_x00813;
  undefined4 extraout_XMM0_Da_x00814;
  undefined4 extraout_XMM0_Da_x00815;
  undefined4 extraout_XMM0_Da_x00816;
  undefined4 extraout_XMM0_Da_x00817;
  undefined4 extraout_XMM0_Da_x00818;
  undefined4 extraout_XMM0_Da_x00819;
  undefined4 extraout_XMM0_Da_x00820;
  undefined4 extraout_XMM0_Da_x00821;
  undefined4 extraout_XMM0_Da_x00822;
  undefined4 extraout_XMM0_Da_x00823;
  undefined4 extraout_XMM0_Da_x00824;
  undefined4 extraout_XMM0_Da_x00825;
  undefined4 extraout_XMM0_Da_x00826;
  undefined4 extraout_XMM0_Da_x00827;
  undefined4 extraout_XMM0_Da_x00828;
  undefined4 extraout_XMM0_Da_x00829;
  undefined4 extraout_XMM0_Da_x00830;
  undefined4 extraout_XMM0_Da_x00831;
  undefined4 extraout_XMM0_Da_x00832;
  undefined4 extraout_XMM0_Da_x00833;
  undefined4 extraout_XMM0_Da_x00834;
  undefined4 extraout_XMM0_Da_x00835;
  undefined4 extraout_XMM0_Da_x00836;
  undefined4 extraout_XMM0_Da_x00837;
  undefined4 extraout_XMM0_Da_x00838;
  undefined4 extraout_XMM0_Da_x00839;
  undefined4 extraout_XMM0_Da_x00840;
  undefined4 extraout_XMM0_Da_x00841;
  undefined4 extraout_XMM0_Da_x00842;
  undefined4 extraout_XMM0_Da_x00843;
  undefined4 extraout_XMM0_Da_x00844;
  undefined4 extraout_XMM0_Da_x00845;
  undefined4 extraout_XMM0_Da_x00846;
  undefined4 extraout_XMM0_Da_x00847;
  undefined4 extraout_XMM0_Da_x00848;
  undefined4 extraout_XMM0_Da_x00849;
  undefined4 extraout_XMM0_Da_x00850;
  undefined4 extraout_XMM0_Da_x00851;
  undefined4 extraout_XMM0_Da_x00852;
  undefined4 extraout_XMM0_Da_x00853;
  undefined4 extraout_XMM0_Da_x00854;
  undefined4 extraout_XMM0_Da_x00855;
  undefined4 extraout_XMM0_Da_x00856;
  undefined4 extraout_XMM0_Da_x00857;
  undefined4 extraout_XMM0_Da_x00858;
  undefined4 extraout_XMM0_Da_x00859;
  undefined4 extraout_XMM0_Da_x00860;
  undefined4 extraout_XMM0_Da_x00861;
  undefined4 extraout_XMM0_Da_x00862;
  undefined4 extraout_XMM0_Da_x00863;
  undefined4 extraout_XMM0_Da_x00864;
  undefined4 extraout_XMM0_Da_x00865;
  undefined4 extraout_XMM0_Da_x00866;
  undefined4 extraout_XMM0_Da_x00867;
  undefined4 extraout_XMM0_Da_x00868;
  undefined4 extraout_XMM0_Da_x00869;
  undefined4 extraout_XMM0_Da_x00870;
  undefined4 extraout_XMM0_Da_x00871;
  undefined4 extraout_XMM0_Da_x00872;
  undefined4 extraout_XMM0_Da_x00873;
  undefined4 extraout_XMM0_Da_x00874;
  undefined4 extraout_XMM0_Da_x00875;
  undefined4 extraout_XMM0_Da_x00876;
  undefined4 extraout_XMM0_Da_x00877;
  undefined4 extraout_XMM0_Da_x00878;
  undefined4 extraout_XMM0_Da_x00879;
  undefined4 extraout_XMM0_Da_x00880;
  undefined4 extraout_XMM0_Da_x00881;
  undefined4 extraout_XMM0_Da_x00882;
  undefined4 extraout_XMM0_Da_x00883;
  undefined4 extraout_XMM0_Da_x00884;
  undefined4 extraout_XMM0_Da_x00885;
  undefined4 extraout_XMM0_Da_x00886;
  undefined4 extraout_XMM0_Da_x00887;
  undefined4 extraout_XMM0_Da_x00888;
  undefined4 extraout_XMM0_Da_x00889;
  undefined4 extraout_XMM0_Da_x00890;
  undefined4 extraout_XMM0_Da_x00891;
  undefined4 extraout_XMM0_Da_x00892;
  undefined4 extraout_XMM0_Da_x00893;
  undefined4 extraout_XMM0_Da_x00894;
  undefined4 extraout_XMM0_Da_x00895;
  undefined4 extraout_XMM0_Da_x00896;
  undefined4 extraout_XMM0_Da_x00897;
  undefined4 extraout_XMM0_Da_x00898;
  undefined4 extraout_XMM0_Da_x00899;
  undefined4 extraout_XMM0_Da_x00900;
  undefined4 extraout_XMM0_Da_x00901;
  undefined4 extraout_XMM0_Da_x00902;
  undefined4 extraout_XMM0_Da_x00903;
  undefined4 extraout_XMM0_Da_x00904;
  undefined4 extraout_XMM0_Da_x00905;
  undefined4 extraout_XMM0_Da_x00906;
  undefined4 extraout_XMM0_Da_x00907;
  undefined4 extraout_XMM0_Da_x00908;
  undefined4 extraout_XMM0_Da_x00909;
  undefined4 extraout_XMM0_Da_x00910;
  undefined4 extraout_XMM0_Da_x00911;
  undefined4 extraout_XMM0_Da_x00912;
  undefined4 extraout_XMM0_Da_x00913;
  undefined4 extraout_XMM0_Da_x00914;
  undefined4 extraout_XMM0_Da_x00915;
  undefined4 extraout_XMM0_Da_x00916;
  undefined4 extraout_XMM0_Da_x00917;
  undefined4 extraout_XMM0_Da_x00918;
  undefined4 extraout_XMM0_Da_x00919;
  undefined4 extraout_XMM0_Da_x00920;
  undefined4 extraout_XMM0_Da_x00921;
  undefined4 extraout_XMM0_Da_x00922;
  undefined4 extraout_XMM0_Da_x00923;
  undefined4 extraout_XMM0_Da_x00924;
  undefined4 extraout_XMM0_Da_x00925;
  undefined4 extraout_XMM0_Da_x00926;
  undefined4 extraout_XMM0_Da_x00927;
  undefined4 extraout_XMM0_Da_x00928;
  undefined4 extraout_XMM0_Da_x00929;
  undefined4 extraout_XMM0_Da_x00930;
  undefined4 extraout_XMM0_Da_x00931;
  undefined4 extraout_XMM0_Da_x00932;
  undefined4 extraout_XMM0_Da_x00933;
  undefined4 extraout_XMM0_Da_x00934;
  undefined4 extraout_XMM0_Da_x00935;
  undefined4 extraout_XMM0_Da_x00936;
  undefined4 extraout_XMM0_Da_x00937;
  undefined4 extraout_XMM0_Da_x00938;
  undefined4 extraout_XMM0_Da_x00939;
  undefined4 extraout_XMM0_Da_x00940;
  undefined4 extraout_XMM0_Da_x00941;
  undefined4 extraout_XMM0_Da_x00942;
  undefined4 extraout_XMM0_Da_x00943;
  undefined4 extraout_XMM0_Da_x00944;
  undefined4 extraout_XMM0_Da_x00945;
  undefined4 extraout_XMM0_Da_x00946;
  undefined4 extraout_XMM0_Da_x00947;
  undefined4 extraout_XMM0_Da_x00948;
  undefined4 extraout_XMM0_Da_x00949;
  undefined4 extraout_XMM0_Da_x00950;
  undefined4 extraout_XMM0_Da_x00951;
  undefined4 extraout_XMM0_Da_x00952;
  undefined4 extraout_XMM0_Da_x00953;
  undefined4 extraout_XMM0_Da_x00954;
  undefined4 extraout_XMM0_Da_x00955;
  undefined4 extraout_XMM0_Da_x00956;
  undefined4 extraout_XMM0_Da_x00957;
  undefined4 extraout_XMM0_Da_x00958;
  undefined4 extraout_XMM0_Da_x00959;
  undefined4 extraout_XMM0_Da_x00960;
  undefined4 extraout_XMM0_Da_x00961;
  undefined4 extraout_XMM0_Da_x00962;
  undefined4 extraout_XMM0_Da_x00963;
  undefined4 extraout_XMM0_Da_x00964;
  undefined4 extraout_XMM0_Da_x00965;
  undefined4 extraout_XMM0_Da_x00966;
  undefined4 extraout_XMM0_Da_x00967;
  undefined4 extraout_XMM0_Da_x00968;
  undefined4 extraout_XMM0_Da_x00969;
  undefined4 extraout_XMM0_Da_x00970;
  undefined4 extraout_XMM0_Da_x00971;
  undefined4 extraout_XMM0_Da_x00972;
  undefined4 extraout_XMM0_Da_x00973;
  undefined4 extraout_XMM0_Da_x00974;
  undefined4 extraout_XMM0_Da_x00975;
  undefined4 extraout_XMM0_Da_x00976;
  undefined4 extraout_XMM0_Da_x00977;
  undefined4 extraout_XMM0_Da_x00978;
  undefined4 extraout_XMM0_Da_x00979;
  undefined4 extraout_XMM0_Da_x00980;
  undefined4 extraout_XMM0_Da_x00981;
  undefined4 extraout_XMM0_Da_x00982;
  undefined4 extraout_XMM0_Da_x00983;
  undefined4 extraout_XMM0_Da_x00984;
  undefined4 extraout_XMM0_Da_x00985;
  undefined4 extraout_XMM0_Da_x00986;
  undefined4 extraout_XMM0_Da_x00987;
  undefined4 extraout_XMM0_Da_x00988;
  undefined4 extraout_XMM0_Da_x00989;
  undefined4 extraout_XMM0_Da_x00990;
  undefined4 extraout_XMM0_Da_x00991;
  undefined4 extraout_XMM0_Da_x00992;
  undefined4 extraout_XMM0_Da_x00993;
  undefined4 extraout_XMM0_Da_x00994;
  undefined4 extraout_XMM0_Da_x00995;
  undefined4 extraout_XMM0_Da_x00996;
  undefined4 extraout_XMM0_Da_x00997;
  undefined4 extraout_XMM0_Da_x00998;
  undefined4 extraout_XMM0_Da_x00999;
  undefined4 extraout_XMM0_Da_x01000;
  undefined4 extraout_XMM0_Da_x01001;
  undefined4 extraout_XMM0_Da_x01002;
  undefined4 extraout_XMM0_Da_x01003;
  undefined4 extraout_XMM0_Da_x01004;
  undefined4 extraout_XMM0_Da_x01005;
  undefined4 extraout_XMM0_Da_x01006;
  undefined4 extraout_XMM0_Da_x01007;
  undefined4 extraout_XMM0_Da_x01008;
  undefined4 extraout_XMM0_Da_x01009;
  undefined4 extraout_XMM0_Da_x01010;
  undefined4 extraout_XMM0_Da_x01011;
  undefined4 extraout_XMM0_Da_x01012;
  undefined4 extraout_XMM0_Da_x01013;
  undefined4 extraout_XMM0_Da_x01014;
  undefined4 extraout_XMM0_Da_x01015;
  undefined4 extraout_XMM0_Da_x01016;
  undefined4 extraout_XMM0_Da_x01017;
  undefined4 extraout_XMM0_Da_x01018;
  undefined4 extraout_XMM0_Da_x01019;
  undefined4 extraout_XMM0_Da_x01020;
  undefined4 extraout_XMM0_Da_x01021;
  undefined4 extraout_XMM0_Da_x01022;
  undefined4 extraout_XMM0_Da_x01023;
  undefined4 extraout_XMM0_Da_x01024;
  undefined4 extraout_XMM0_Da_x01025;
  undefined4 extraout_XMM0_Da_x01026;
  undefined4 extraout_XMM0_Da_x01027;
  undefined4 extraout_XMM0_Da_x01028;
  undefined4 extraout_XMM0_Da_x01029;
  undefined4 extraout_XMM0_Da_x01030;
  undefined4 extraout_XMM0_Da_x01031;
  undefined4 extraout_XMM0_Da_x01032;
  undefined4 extraout_XMM0_Da_x01033;
  undefined4 extraout_XMM0_Da_x01034;
  undefined4 extraout_XMM0_Da_x01035;
  undefined4 extraout_XMM0_Da_x01036;
  undefined4 extraout_XMM0_Da_x01037;
  undefined4 extraout_XMM0_Da_x01038;
  undefined4 extraout_XMM0_Da_x01039;
  undefined4 extraout_XMM0_Da_x01040;
  undefined4 extraout_XMM0_Da_x01041;
  undefined4 extraout_XMM0_Da_x01042;
  undefined4 extraout_XMM0_Da_x01043;
  undefined4 extraout_XMM0_Da_x01044;
  undefined4 extraout_XMM0_Da_x01045;
  undefined4 extraout_XMM0_Da_x01046;
  undefined4 extraout_XMM0_Da_x01047;
  undefined4 extraout_XMM0_Da_x01048;
  undefined4 extraout_XMM0_Da_x01049;
  undefined4 extraout_XMM0_Da_x01050;
  undefined4 extraout_XMM0_Da_x01051;
  undefined4 extraout_XMM0_Da_x01052;
  undefined4 extraout_XMM0_Da_x01053;
  undefined4 extraout_XMM0_Da_x01054;
  undefined4 extraout_XMM0_Da_x01055;
  undefined4 extraout_XMM0_Da_x01056;
  undefined4 extraout_XMM0_Da_x01057;
  undefined4 extraout_XMM0_Da_x01058;
  undefined4 extraout_XMM0_Da_x01059;
  undefined4 extraout_XMM0_Da_x01060;
  undefined4 extraout_XMM0_Da_x01061;
  undefined4 extraout_XMM0_Da_x01062;
  undefined4 extraout_XMM0_Da_x01063;
  undefined4 extraout_XMM0_Da_x01064;
  undefined4 extraout_XMM0_Da_x01065;
  undefined4 extraout_XMM0_Da_x01066;
  undefined4 extraout_XMM0_Da_x01067;
  undefined4 extraout_XMM0_Da_x01068;
  undefined4 extraout_XMM0_Da_x01069;
  undefined4 extraout_XMM0_Da_x01070;
  undefined4 extraout_XMM0_Da_x01071;
  undefined4 extraout_XMM0_Da_x01072;
  undefined4 extraout_XMM0_Da_x01073;
  undefined4 extraout_XMM0_Da_x01074;
  undefined4 extraout_XMM0_Da_x01075;
  undefined4 extraout_XMM0_Da_x01076;
  undefined4 extraout_XMM0_Da_x01077;
  undefined4 extraout_XMM0_Da_x01078;
  undefined4 extraout_XMM0_Da_x01079;
  undefined4 extraout_XMM0_Da_x01080;
  undefined4 extraout_XMM0_Da_x01081;
  undefined4 extraout_XMM0_Da_x01082;
  undefined4 extraout_XMM0_Da_x01083;
  undefined4 extraout_XMM0_Da_x01084;
  undefined4 extraout_XMM0_Da_x01085;
  undefined4 extraout_XMM0_Da_x01086;
  undefined4 extraout_XMM0_Da_x01087;
  undefined4 extraout_XMM0_Da_x01088;
  undefined4 extraout_XMM0_Da_x01089;
  undefined4 extraout_XMM0_Da_x01090;
  undefined4 extraout_XMM0_Da_x01091;
  undefined4 extraout_XMM0_Da_x01092;
  undefined4 extraout_XMM0_Da_x01093;
  undefined4 extraout_XMM0_Da_x01094;
  undefined4 extraout_XMM0_Da_x01095;
  undefined4 extraout_XMM0_Da_x01096;
  undefined4 extraout_XMM0_Da_x01097;
  undefined4 extraout_XMM0_Da_x01098;
  undefined4 extraout_XMM0_Da_x01099;
  undefined4 extraout_XMM0_Da_x01100;
  undefined4 extraout_XMM0_Da_x01101;
  undefined4 extraout_XMM0_Da_x01102;
  undefined4 extraout_XMM0_Da_x01103;
  undefined4 extraout_XMM0_Da_x01104;
  undefined4 extraout_XMM0_Da_x01105;
  undefined4 extraout_XMM0_Da_x01106;
  undefined4 extraout_XMM0_Da_x01107;
  undefined4 extraout_XMM0_Da_x01108;
  undefined4 extraout_XMM0_Da_x01109;
  undefined4 extraout_XMM0_Da_x01110;
  undefined4 extraout_XMM0_Da_x01111;
  undefined4 extraout_XMM0_Da_x01112;
  undefined4 extraout_XMM0_Da_x01113;
  undefined4 extraout_XMM0_Da_x01114;
  undefined4 extraout_XMM0_Da_x01115;
  undefined4 extraout_XMM0_Da_x01116;
  undefined4 extraout_XMM0_Da_x01117;
  undefined4 extraout_XMM0_Da_x01118;
  undefined4 extraout_XMM0_Da_x01119;
  undefined4 extraout_XMM0_Da_x01120;
  undefined4 extraout_XMM0_Da_x01121;
  undefined4 extraout_XMM0_Da_x01122;
  undefined4 extraout_XMM0_Da_x01123;
  undefined4 extraout_XMM0_Da_x01124;
  undefined4 extraout_XMM0_Da_x01125;
  undefined4 extraout_XMM0_Da_x01126;
  undefined4 extraout_XMM0_Da_x01127;
  undefined4 extraout_XMM0_Da_x01128;
  undefined4 extraout_XMM0_Da_x01129;
  undefined4 extraout_XMM0_Da_x01130;
  undefined4 extraout_XMM0_Da_x01131;
  undefined4 extraout_XMM0_Da_x01132;
  undefined4 extraout_XMM0_Da_x01133;
  undefined4 extraout_XMM0_Da_x01134;
  undefined4 extraout_XMM0_Da_x01135;
  undefined4 extraout_XMM0_Da_x01136;
  undefined4 extraout_XMM0_Da_x01137;
  undefined4 extraout_XMM0_Da_x01138;
  undefined4 extraout_XMM0_Da_x01139;
  undefined4 extraout_XMM0_Da_x01140;
  undefined4 extraout_XMM0_Da_x01141;
  undefined4 extraout_XMM0_Da_x01142;
  undefined4 extraout_XMM0_Da_x01143;
  undefined4 extraout_XMM0_Da_x01144;
  undefined4 extraout_XMM0_Da_x01145;
  undefined4 extraout_XMM0_Da_x01146;
  undefined4 extraout_XMM0_Da_x01147;
  undefined4 extraout_XMM0_Da_x01148;
  undefined4 extraout_XMM0_Da_x01149;
  undefined4 extraout_XMM0_Da_x01150;
  undefined4 extraout_XMM0_Da_x01151;
  undefined4 extraout_XMM0_Da_x01152;
  undefined4 extraout_XMM0_Da_x01153;
  undefined4 extraout_XMM0_Da_x01154;
  undefined4 extraout_XMM0_Da_x01155;
  undefined4 extraout_XMM0_Da_x01156;
  undefined4 extraout_XMM0_Da_x01157;
  undefined4 extraout_XMM0_Da_x01158;
  undefined4 extraout_XMM0_Da_x01159;
  undefined4 extraout_XMM0_Da_x01160;
  undefined4 extraout_XMM0_Da_x01161;
  undefined4 extraout_XMM0_Da_x01162;
  undefined4 extraout_XMM0_Da_x01163;
  undefined4 extraout_XMM0_Da_x01164;
  undefined4 extraout_XMM0_Da_x01165;
  undefined4 extraout_XMM0_Da_x01166;
  undefined4 extraout_XMM0_Da_x01167;
  undefined4 extraout_XMM0_Da_x01168;
  undefined4 extraout_XMM0_Da_x01169;
  undefined4 extraout_XMM0_Da_x01170;
  undefined4 extraout_XMM0_Da_x01171;
  undefined4 extraout_XMM0_Da_x01172;
  undefined4 extraout_XMM0_Da_x01173;
  undefined4 extraout_XMM0_Da_x01174;
  undefined4 extraout_XMM0_Da_x01175;
  undefined4 extraout_XMM0_Da_x01176;
  undefined4 extraout_XMM0_Da_x01177;
  undefined4 extraout_XMM0_Da_x01178;
  undefined4 extraout_XMM0_Da_x01179;
  undefined4 extraout_XMM0_Da_x01180;
  undefined4 extraout_XMM0_Da_x01181;
  undefined4 extraout_XMM0_Da_x01182;
  undefined4 extraout_XMM0_Da_x01183;
  undefined4 extraout_XMM0_Da_x01184;
  undefined4 extraout_XMM0_Da_x01185;
  undefined4 extraout_XMM0_Da_x01186;
  undefined4 extraout_XMM0_Da_x01187;
  undefined4 extraout_XMM0_Da_x01188;
  undefined4 extraout_XMM0_Da_x01189;
  undefined4 extraout_XMM0_Da_x01190;
  undefined4 extraout_XMM0_Da_x01191;
  undefined4 extraout_XMM0_Da_x01192;
  undefined4 extraout_XMM0_Da_x01193;
  undefined4 extraout_XMM0_Da_x01194;
  undefined4 extraout_XMM0_Da_x01195;
  undefined4 extraout_XMM0_Da_x01196;
  undefined4 extraout_XMM0_Da_x01197;
  undefined4 extraout_XMM0_Da_x01198;
  undefined4 extraout_XMM0_Da_x01199;
  undefined4 extraout_XMM0_Da_x01200;
  undefined4 extraout_XMM0_Da_x01201;
  undefined4 extraout_XMM0_Da_x01202;
  undefined4 extraout_XMM0_Da_x01203;
  undefined4 extraout_XMM0_Da_x01204;
  undefined4 extraout_XMM0_Da_x01205;
  undefined4 extraout_XMM0_Da_x01206;
  undefined4 extraout_XMM0_Da_x01207;
  undefined4 extraout_XMM0_Da_x01208;
  undefined4 extraout_XMM0_Da_x01209;
  undefined4 extraout_XMM0_Da_x01210;
  undefined4 extraout_XMM0_Da_x01211;
  undefined4 extraout_XMM0_Da_x01212;
  undefined4 extraout_XMM0_Da_x01213;
  undefined4 extraout_XMM0_Da_x01214;
  undefined4 extraout_XMM0_Da_x01215;
  undefined4 extraout_XMM0_Da_x01216;
  undefined4 extraout_XMM0_Da_x01217;
  undefined4 extraout_XMM0_Da_x01218;
  undefined4 extraout_XMM0_Da_x01219;
  undefined4 extraout_XMM0_Da_x01220;
  undefined4 extraout_XMM0_Da_x01221;
  undefined4 extraout_XMM0_Da_x01222;
  undefined4 extraout_XMM0_Da_x01223;
  undefined4 extraout_XMM0_Da_x01224;
  undefined4 extraout_XMM0_Da_x01225;
  undefined4 extraout_XMM0_Da_x01226;
  undefined4 extraout_XMM0_Da_x01227;
  undefined4 extraout_XMM0_Da_x01228;
  undefined4 extraout_XMM0_Da_x01229;
  undefined4 extraout_XMM0_Da_x01230;
  undefined4 extraout_XMM0_Da_x01231;
  undefined4 extraout_XMM0_Da_x01232;
  undefined4 extraout_XMM0_Da_x01233;
  undefined4 extraout_XMM0_Da_x01234;
  undefined4 extraout_XMM0_Da_x01235;
  undefined4 extraout_XMM0_Da_x01236;
  undefined4 extraout_XMM0_Da_x01237;
  undefined4 extraout_XMM0_Da_x01238;
  undefined4 extraout_XMM0_Da_x01239;
  undefined4 extraout_XMM0_Da_x01240;
  undefined4 extraout_XMM0_Da_x01241;
  undefined4 extraout_XMM0_Da_x01242;
  undefined4 extraout_XMM0_Da_x01243;
  undefined4 extraout_XMM0_Da_x01244;
  undefined4 extraout_XMM0_Da_x01245;
  undefined4 extraout_XMM0_Da_x01246;
  undefined4 extraout_XMM0_Da_x01247;
  undefined4 extraout_XMM0_Da_x01248;
  undefined4 extraout_XMM0_Da_x01249;
  undefined4 extraout_XMM0_Da_x01250;
  undefined4 extraout_XMM0_Da_x01251;
  undefined4 extraout_XMM0_Da_x01252;
  undefined4 extraout_XMM0_Da_x01253;
  undefined4 extraout_XMM0_Da_x01254;
  undefined4 extraout_XMM0_Da_x01255;
  undefined4 extraout_XMM0_Da_x01256;
  undefined4 extraout_XMM0_Da_x01257;
  undefined4 extraout_XMM0_Da_x01258;
  undefined4 extraout_XMM0_Da_x01259;
  undefined4 extraout_XMM0_Da_x01260;
  undefined4 extraout_XMM0_Da_x01261;
  undefined4 extraout_XMM0_Da_x01262;
  undefined4 extraout_XMM0_Da_x01263;
  undefined4 extraout_XMM0_Da_x01264;
  undefined4 extraout_XMM0_Da_x01265;
  undefined4 extraout_XMM0_Da_x01266;
  undefined4 extraout_XMM0_Da_x01267;
  undefined4 extraout_XMM0_Da_x01268;
  undefined4 extraout_XMM0_Da_x01269;
  undefined4 extraout_XMM0_Da_x01270;
  undefined4 extraout_XMM0_Da_x01271;
  undefined4 extraout_XMM0_Da_x01272;
  undefined4 extraout_XMM0_Da_x01273;
  undefined4 extraout_XMM0_Da_x01274;
  undefined4 extraout_XMM0_Da_x01275;
  undefined4 extraout_XMM0_Da_x01276;
  undefined4 extraout_XMM0_Da_x01277;
  undefined4 extraout_XMM0_Da_x01278;
  undefined4 extraout_XMM0_Da_x01279;
  undefined4 extraout_XMM0_Da_x01280;
  undefined4 extraout_XMM0_Da_x01281;
  undefined4 extraout_XMM0_Da_x01282;
  undefined4 extraout_XMM0_Da_x01283;
  undefined4 extraout_XMM0_Da_x01284;
  undefined4 extraout_XMM0_Da_x01285;
  undefined4 extraout_XMM0_Da_x01286;
  undefined4 extraout_XMM0_Da_x01287;
  undefined4 extraout_XMM0_Da_x01288;
  undefined4 extraout_XMM0_Da_x01289;
  undefined4 extraout_XMM0_Da_x01290;
  undefined4 extraout_XMM0_Da_x01291;
  undefined4 extraout_XMM0_Da_x01292;
  undefined4 extraout_XMM0_Da_x01293;
  undefined4 extraout_XMM0_Da_x01294;
  undefined4 extraout_XMM0_Da_x01295;
  undefined4 extraout_XMM0_Da_x01296;
  undefined4 extraout_XMM0_Da_x01297;
  undefined4 extraout_XMM0_Da_x01298;
  undefined4 extraout_XMM0_Da_x01299;
  undefined4 extraout_XMM0_Da_x01300;
  undefined4 extraout_XMM0_Da_x01301;
  undefined4 extraout_XMM0_Da_x01302;
  undefined4 extraout_XMM0_Da_x01303;
  undefined4 extraout_XMM0_Da_x01304;
  undefined4 extraout_XMM0_Da_x01305;
  undefined4 extraout_XMM0_Da_x01306;
  undefined4 extraout_XMM0_Da_x01307;
  undefined4 extraout_XMM0_Da_x01308;
  undefined4 extraout_XMM0_Da_x01309;
  undefined4 extraout_XMM0_Da_x01310;
  undefined4 extraout_XMM0_Da_x01311;
  undefined4 extraout_XMM0_Da_x01312;
  undefined4 extraout_XMM0_Da_x01313;
  undefined4 extraout_XMM0_Da_x01314;
  undefined4 extraout_XMM0_Da_x01315;
  undefined4 extraout_XMM0_Da_x01316;
  undefined4 extraout_XMM0_Da_x01317;
  undefined4 extraout_XMM0_Da_x01318;
  undefined4 extraout_XMM0_Da_x01319;
  undefined4 extraout_XMM0_Da_x01320;
  undefined4 extraout_XMM0_Da_x01321;
  undefined4 extraout_XMM0_Da_x01322;
  undefined4 extraout_XMM0_Da_x01323;
  undefined4 extraout_XMM0_Da_x01324;
  undefined4 extraout_XMM0_Da_x01325;
  undefined4 extraout_XMM0_Da_x01326;
  undefined4 extraout_XMM0_Da_x01327;
  undefined4 extraout_XMM0_Da_x01328;
  undefined4 extraout_XMM0_Da_x01329;
  undefined4 extraout_XMM0_Da_x01330;
  undefined4 extraout_XMM0_Da_x01331;
  undefined4 extraout_XMM0_Da_x01332;
  undefined4 extraout_XMM0_Da_x01333;
  undefined4 extraout_XMM0_Da_x01334;
  undefined4 extraout_XMM0_Da_x01335;
  undefined4 extraout_XMM0_Da_x01336;
  undefined4 extraout_XMM0_Da_x01337;
  undefined4 extraout_XMM0_Da_x01338;
  undefined4 extraout_XMM0_Da_x01339;
  undefined4 extraout_XMM0_Da_x01340;
  undefined4 extraout_XMM0_Da_x01341;
  undefined4 extraout_XMM0_Da_x01342;
  undefined4 extraout_XMM0_Da_x01343;
  undefined4 extraout_XMM0_Da_x01344;
  undefined4 extraout_XMM0_Da_x01345;
  undefined4 extraout_XMM0_Da_x01346;
  undefined4 extraout_XMM0_Da_x01347;
  undefined4 extraout_XMM0_Da_x01348;
  undefined4 extraout_XMM0_Da_x01349;
  undefined4 extraout_XMM0_Da_x01350;
  undefined4 extraout_XMM0_Da_x01351;
  undefined4 extraout_XMM0_Da_x01352;
  undefined4 extraout_XMM0_Da_x01353;
  undefined4 extraout_XMM0_Da_x01354;
  undefined4 extraout_XMM0_Da_x01355;
  undefined4 extraout_XMM0_Da_x01356;
  undefined4 extraout_XMM0_Da_x01357;
  undefined4 extraout_XMM0_Da_x01358;
  undefined4 extraout_XMM0_Da_x01359;
  undefined4 extraout_XMM0_Da_x01360;
  undefined4 extraout_XMM0_Da_x01361;
  undefined4 extraout_XMM0_Da_x01362;
  undefined4 extraout_XMM0_Da_x01363;
  undefined4 extraout_XMM0_Da_x01364;
  undefined4 extraout_XMM0_Da_x01365;
  undefined4 extraout_XMM0_Da_x01366;
  undefined4 extraout_XMM0_Da_x01367;
  undefined4 extraout_XMM0_Da_x01368;
  undefined4 extraout_XMM0_Da_x01369;
  undefined4 extraout_XMM0_Da_x01370;
  undefined4 extraout_XMM0_Da_x01371;
  undefined4 extraout_XMM0_Da_x01372;
  undefined4 extraout_XMM0_Da_x01373;
  undefined4 extraout_XMM0_Da_x01374;
  undefined4 extraout_XMM0_Da_x01375;
  undefined4 extraout_XMM0_Da_x01376;
  undefined4 extraout_XMM0_Da_x01377;
  undefined4 extraout_XMM0_Da_x01378;
  undefined4 extraout_XMM0_Da_x01379;
  undefined4 extraout_XMM0_Da_x01380;
  undefined4 extraout_XMM0_Da_x01381;
  undefined4 extraout_XMM0_Da_x01382;
  undefined4 extraout_XMM0_Da_x01383;
  undefined4 extraout_XMM0_Da_x01384;
  undefined4 extraout_XMM0_Da_x01385;
  undefined4 extraout_XMM0_Da_x01386;
  undefined4 extraout_XMM0_Da_x01387;
  undefined4 extraout_XMM0_Da_x01388;
  undefined4 extraout_XMM0_Da_x01389;
  undefined4 extraout_XMM0_Da_x01390;
  undefined4 extraout_XMM0_Da_x01391;
  undefined4 extraout_XMM0_Da_x01392;
  undefined4 extraout_XMM0_Da_x01393;
  undefined4 extraout_XMM0_Da_x01394;
  undefined4 extraout_XMM0_Da_x01395;
  undefined4 extraout_XMM0_Da_x01396;
  undefined4 extraout_XMM0_Da_x01397;
  undefined4 extraout_XMM0_Da_x01398;
  undefined4 extraout_XMM0_Da_x01399;
  undefined4 extraout_XMM0_Da_x01400;
  undefined4 extraout_XMM0_Da_x01401;
  undefined4 extraout_XMM0_Da_x01402;
  undefined4 extraout_XMM0_Da_x01403;
  undefined4 extraout_XMM0_Da_x01404;
  undefined4 extraout_XMM0_Da_x01405;
  undefined4 extraout_XMM0_Da_x01406;
  undefined4 extraout_XMM0_Da_x01407;
  undefined4 extraout_XMM0_Da_x01408;
  undefined4 extraout_XMM0_Da_x01409;
  undefined4 extraout_XMM0_Da_x01410;
  undefined4 extraout_XMM0_Da_x01411;
  undefined4 extraout_XMM0_Da_x01412;
  undefined4 extraout_XMM0_Da_x01413;
  undefined4 extraout_XMM0_Da_x01414;
  undefined4 extraout_XMM0_Da_x01415;
  undefined4 extraout_XMM0_Da_x01416;
  undefined4 extraout_XMM0_Da_x01417;
  undefined4 extraout_XMM0_Da_x01418;
  undefined4 extraout_XMM0_Da_x01419;
  undefined4 extraout_XMM0_Da_x01420;
  undefined4 extraout_XMM0_Da_x01421;
  undefined4 extraout_XMM0_Da_x01422;
  undefined4 extraout_XMM0_Da_x01423;
  undefined4 extraout_XMM0_Da_x01424;
  undefined4 extraout_XMM0_Da_x01425;
  undefined4 extraout_XMM0_Da_x01426;
  undefined4 extraout_XMM0_Da_x01427;
  undefined4 extraout_XMM0_Da_x01428;
  undefined4 extraout_XMM0_Da_x01429;
  undefined4 extraout_XMM0_Da_x01430;
  undefined4 extraout_XMM0_Da_x01431;
  undefined4 extraout_XMM0_Da_x01432;
  undefined4 extraout_XMM0_Da_x01433;
  undefined4 extraout_XMM0_Da_x01434;
  undefined4 extraout_XMM0_Da_x01435;
  undefined4 extraout_XMM0_Da_x01436;
  undefined4 extraout_XMM0_Da_x01437;
  undefined4 extraout_XMM0_Da_x01438;
  undefined4 extraout_XMM0_Da_x01439;
  undefined4 extraout_XMM0_Da_x01440;
  undefined4 extraout_XMM0_Da_x01441;
  undefined4 extraout_XMM0_Da_x01442;
  undefined4 extraout_XMM0_Da_x01443;
  undefined4 extraout_XMM0_Da_x01444;
  undefined4 extraout_XMM0_Da_x01445;
  undefined4 extraout_XMM0_Da_x01446;
  undefined4 extraout_XMM0_Da_x01447;
  undefined4 extraout_XMM0_Da_x01448;
  undefined4 extraout_XMM0_Da_x01449;
  undefined4 extraout_XMM0_Da_x01450;
  undefined4 extraout_XMM0_Da_x01451;
  undefined4 extraout_XMM0_Da_x01452;
  undefined4 extraout_XMM0_Da_x01453;
  undefined4 extraout_XMM0_Da_x01454;
  undefined4 extraout_XMM0_Da_x01455;
  undefined4 extraout_XMM0_Da_x01456;
  undefined4 extraout_XMM0_Da_x01457;
  undefined4 extraout_XMM0_Da_x01458;
  undefined4 extraout_XMM0_Da_x01459;
  undefined4 extraout_XMM0_Da_x01460;
  undefined4 extraout_XMM0_Da_x01461;
  undefined4 extraout_XMM0_Da_x01462;
  undefined4 extraout_XMM0_Da_x01463;
  undefined4 extraout_XMM0_Da_x01464;
  undefined4 extraout_XMM0_Da_x01465;
  undefined4 extraout_XMM0_Da_x01466;
  undefined4 extraout_XMM0_Da_x01467;
  undefined4 extraout_XMM0_Da_x01468;
  undefined4 extraout_XMM0_Da_x01469;
  undefined4 extraout_XMM0_Da_x01470;
  undefined4 extraout_XMM0_Da_x01471;
  undefined4 extraout_XMM0_Da_x01472;
  undefined4 extraout_XMM0_Da_x01473;
  undefined4 extraout_XMM0_Da_x01474;
  undefined4 extraout_XMM0_Da_x01475;
  undefined4 extraout_XMM0_Da_x01476;
  undefined4 extraout_XMM0_Da_x01477;
  undefined4 extraout_XMM0_Da_x01478;
  undefined4 extraout_XMM0_Da_x01479;
  undefined4 extraout_XMM0_Da_x01480;
  undefined4 extraout_XMM0_Da_x01481;
  undefined4 extraout_XMM0_Da_x01482;
  undefined4 extraout_XMM0_Da_x01483;
  undefined4 extraout_XMM0_Da_x01484;
  undefined4 extraout_XMM0_Da_x01485;
  undefined4 extraout_XMM0_Da_x01486;
  undefined4 extraout_XMM0_Da_x01487;
  undefined4 extraout_XMM0_Da_x01488;
  undefined4 extraout_XMM0_Da_x01489;
  undefined4 extraout_XMM0_Da_x01490;
  undefined4 extraout_XMM0_Da_x01491;
  undefined4 extraout_XMM0_Da_x01492;
  undefined4 extraout_XMM0_Da_x01493;
  undefined4 extraout_XMM0_Da_x01494;
  undefined4 extraout_XMM0_Da_x01495;
  undefined4 extraout_XMM0_Da_x01496;
  undefined4 extraout_XMM0_Da_x01497;
  undefined4 extraout_XMM0_Da_x01498;
  undefined4 extraout_XMM0_Da_x01499;
  undefined4 extraout_XMM0_Da_x01500;
  undefined4 extraout_XMM0_Da_x01501;
  undefined4 extraout_XMM0_Da_x01502;
  undefined4 extraout_XMM0_Da_x01503;
  undefined4 extraout_XMM0_Da_x01504;
  undefined4 extraout_XMM0_Da_x01505;
  undefined4 extraout_XMM0_Da_x01506;
  undefined4 extraout_XMM0_Da_x01507;
  undefined4 extraout_XMM0_Da_x01508;
  undefined4 extraout_XMM0_Da_x01509;
  undefined4 extraout_XMM0_Da_x01510;
  undefined4 extraout_XMM0_Da_x01511;
  undefined4 extraout_XMM0_Da_x01512;
  undefined4 extraout_XMM0_Da_x01513;
  undefined4 extraout_XMM0_Da_x01514;
  undefined4 extraout_XMM0_Da_x01515;
  undefined4 extraout_XMM0_Da_x01516;
  undefined4 extraout_XMM0_Da_x01517;
  undefined4 extraout_XMM0_Da_x01518;
  undefined4 extraout_XMM0_Da_x01519;
  undefined4 extraout_XMM0_Da_x01520;
  undefined4 extraout_XMM0_Da_x01521;
  undefined4 extraout_XMM0_Da_x01522;
  undefined4 extraout_XMM0_Da_x01523;
  undefined4 extraout_XMM0_Da_x01524;
  undefined4 extraout_XMM0_Da_x01525;
  undefined4 extraout_XMM0_Da_x01526;
  undefined4 extraout_XMM0_Da_x01527;
  undefined4 extraout_XMM0_Da_x01528;
  undefined4 extraout_XMM0_Da_x01529;
  undefined4 extraout_XMM0_Da_x01530;
  undefined4 extraout_XMM0_Da_x01531;
  undefined4 extraout_XMM0_Da_x01532;
  undefined4 extraout_XMM0_Da_x01533;
  undefined4 extraout_XMM0_Da_x01534;
  undefined4 extraout_XMM0_Da_x01535;
  undefined4 extraout_XMM0_Da_x01536;
  undefined4 extraout_XMM0_Da_x01537;
  undefined4 extraout_XMM0_Da_x01538;
  undefined4 extraout_XMM0_Da_x01539;
  undefined4 extraout_XMM0_Da_x01540;
  undefined4 extraout_XMM0_Da_x01541;
  undefined4 extraout_XMM0_Da_x01542;
  undefined4 extraout_XMM0_Da_x01543;
  undefined4 extraout_XMM0_Da_x01544;
  undefined4 extraout_XMM0_Da_x01545;
  undefined4 extraout_XMM0_Da_x01546;
  undefined4 extraout_XMM0_Da_x01547;
  undefined4 extraout_XMM0_Da_x01548;
  undefined4 extraout_XMM0_Da_x01549;
  undefined4 extraout_XMM0_Da_x01550;
  undefined4 extraout_XMM0_Da_x01551;
  undefined4 extraout_XMM0_Da_x01552;
  undefined4 extraout_XMM0_Da_x01553;
  undefined4 extraout_XMM0_Da_x01554;
  undefined4 extraout_XMM0_Da_x01555;
  undefined4 extraout_XMM0_Da_x01556;
  undefined4 extraout_XMM0_Da_x01557;
  undefined4 extraout_XMM0_Da_x01558;
  undefined4 extraout_XMM0_Da_x01559;
  undefined4 extraout_XMM0_Da_x01560;
  undefined4 extraout_XMM0_Da_x01561;
  undefined4 extraout_XMM0_Da_x01562;
  undefined4 extraout_XMM0_Da_x01563;
  undefined4 extraout_XMM0_Da_x01564;
  undefined4 extraout_XMM0_Da_x01565;
  undefined4 extraout_XMM0_Da_x01566;
  undefined4 extraout_XMM0_Da_x01567;
  undefined4 extraout_XMM0_Da_x01568;
  undefined4 extraout_XMM0_Da_x01569;
  undefined4 extraout_XMM0_Da_x01570;
  undefined4 extraout_XMM0_Da_x01571;
  undefined4 extraout_XMM0_Da_x01572;
  undefined4 extraout_XMM0_Da_x01573;
  undefined4 extraout_XMM0_Da_x01574;
  undefined4 extraout_XMM0_Da_x01575;
  undefined4 extraout_XMM0_Da_x01576;
  undefined4 extraout_XMM0_Da_x01577;
  undefined4 extraout_XMM0_Da_x01578;
  undefined4 extraout_XMM0_Da_x01579;
  undefined4 extraout_XMM0_Da_x01580;
  undefined4 extraout_XMM0_Da_x01581;
  undefined4 extraout_XMM0_Da_x01582;
  undefined4 extraout_XMM0_Da_x01583;
  undefined4 extraout_XMM0_Da_x01584;
  undefined4 extraout_XMM0_Da_x01585;
  undefined4 extraout_XMM0_Da_x01586;
  undefined4 extraout_XMM0_Da_x01587;
  undefined4 extraout_XMM0_Da_x01588;
  undefined4 extraout_XMM0_Da_x01589;
  undefined4 extraout_XMM0_Da_x01590;
  undefined4 extraout_XMM0_Da_x01591;
  undefined4 extraout_XMM0_Da_x01592;
  undefined4 extraout_XMM0_Da_x01593;
  undefined4 extraout_XMM0_Da_x01594;
  undefined4 extraout_XMM0_Da_x01595;
  undefined4 extraout_XMM0_Da_x01596;
  undefined4 extraout_XMM0_Da_x01597;
  undefined4 extraout_XMM0_Da_x01598;
  undefined4 extraout_XMM0_Da_x01599;
  undefined4 extraout_XMM0_Da_x01600;
  undefined4 extraout_XMM0_Da_x01601;
  undefined4 extraout_XMM0_Da_x01602;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Db_25;
  undefined4 extraout_XMM0_Db_26;
  undefined4 extraout_XMM0_Db_27;
  undefined4 extraout_XMM0_Db_28;
  undefined4 extraout_XMM0_Db_29;
  undefined4 extraout_XMM0_Db_30;
  undefined4 extraout_XMM0_Db_31;
  undefined4 extraout_XMM0_Db_32;
  undefined4 extraout_XMM0_Db_33;
  undefined4 extraout_XMM0_Db_34;
  undefined4 extraout_XMM0_Db_35;
  undefined4 extraout_XMM0_Db_36;
  undefined4 extraout_XMM0_Db_37;
  undefined4 extraout_XMM0_Db_38;
  undefined4 extraout_XMM0_Db_39;
  undefined4 extraout_XMM0_Db_40;
  undefined4 extraout_XMM0_Db_41;
  undefined4 extraout_XMM0_Db_42;
  undefined4 extraout_XMM0_Db_43;
  undefined4 extraout_XMM0_Db_44;
  undefined4 extraout_XMM0_Db_45;
  undefined4 extraout_XMM0_Db_46;
  undefined4 extraout_XMM0_Db_47;
  undefined4 extraout_XMM0_Db_48;
  undefined4 extraout_XMM0_Db_49;
  undefined4 extraout_XMM0_Db_50;
  undefined4 extraout_XMM0_Db_51;
  undefined4 extraout_XMM0_Db_52;
  undefined4 extraout_XMM0_Db_53;
  undefined4 extraout_XMM0_Db_54;
  undefined4 extraout_XMM0_Db_55;
  undefined4 extraout_XMM0_Db_56;
  undefined4 extraout_XMM0_Db_57;
  undefined4 extraout_XMM0_Db_58;
  undefined4 extraout_XMM0_Db_59;
  undefined4 extraout_XMM0_Db_60;
  undefined4 extraout_XMM0_Db_61;
  undefined4 extraout_XMM0_Db_62;
  undefined4 extraout_XMM0_Db_63;
  undefined4 extraout_XMM0_Db_64;
  undefined4 extraout_XMM0_Db_65;
  undefined4 extraout_XMM0_Db_66;
  undefined4 extraout_XMM0_Db_67;
  undefined4 extraout_XMM0_Db_68;
  undefined4 extraout_XMM0_Db_69;
  undefined4 extraout_XMM0_Db_70;
  undefined4 extraout_XMM0_Db_71;
  undefined4 extraout_XMM0_Db_72;
  undefined4 extraout_XMM0_Db_73;
  undefined4 extraout_XMM0_Db_74;
  undefined4 extraout_XMM0_Db_75;
  undefined4 extraout_XMM0_Db_76;
  undefined4 extraout_XMM0_Db_77;
  undefined4 extraout_XMM0_Db_78;
  undefined4 extraout_XMM0_Db_79;
  undefined4 extraout_XMM0_Db_80;
  undefined4 extraout_XMM0_Db_81;
  undefined4 extraout_XMM0_Db_82;
  undefined4 extraout_XMM0_Db_83;
  undefined4 extraout_XMM0_Db_84;
  undefined4 extraout_XMM0_Db_85;
  undefined4 extraout_XMM0_Db_86;
  undefined4 extraout_XMM0_Db_87;
  undefined4 extraout_XMM0_Db_88;
  undefined4 extraout_XMM0_Db_89;
  undefined4 extraout_XMM0_Db_90;
  undefined4 extraout_XMM0_Db_91;
  undefined4 extraout_XMM0_Db_92;
  undefined4 extraout_XMM0_Db_93;
  undefined4 extraout_XMM0_Db_94;
  undefined4 extraout_XMM0_Db_95;
  undefined4 extraout_XMM0_Db_96;
  undefined4 extraout_XMM0_Db_97;
  undefined4 extraout_XMM0_Db_98;
  undefined4 extraout_XMM0_Db_99;
  undefined4 extraout_XMM0_Db_x00100;
  undefined4 extraout_XMM0_Db_x00101;
  undefined4 extraout_XMM0_Db_x00102;
  undefined4 extraout_XMM0_Db_x00103;
  undefined4 extraout_XMM0_Db_x00104;
  undefined4 extraout_XMM0_Db_x00105;
  undefined4 extraout_XMM0_Db_x00106;
  undefined4 extraout_XMM0_Db_x00107;
  undefined4 extraout_XMM0_Db_x00108;
  undefined4 extraout_XMM0_Db_x00109;
  undefined4 extraout_XMM0_Db_x00110;
  undefined4 extraout_XMM0_Db_x00111;
  undefined4 extraout_XMM0_Db_x00112;
  undefined4 extraout_XMM0_Db_x00113;
  undefined4 extraout_XMM0_Db_x00114;
  undefined4 extraout_XMM0_Db_x00115;
  undefined4 extraout_XMM0_Db_x00116;
  undefined4 extraout_XMM0_Db_x00117;
  undefined4 extraout_XMM0_Db_x00118;
  undefined4 extraout_XMM0_Db_x00119;
  undefined4 extraout_XMM0_Db_x00120;
  undefined4 extraout_XMM0_Db_x00121;
  undefined4 extraout_XMM0_Db_x00122;
  undefined4 extraout_XMM0_Db_x00123;
  undefined4 extraout_XMM0_Db_x00124;
  undefined4 extraout_XMM0_Db_x00125;
  undefined4 extraout_XMM0_Db_x00126;
  undefined4 extraout_XMM0_Db_x00127;
  undefined4 extraout_XMM0_Db_x00128;
  undefined4 extraout_XMM0_Db_x00129;
  undefined4 extraout_XMM0_Db_x00130;
  undefined4 extraout_XMM0_Db_x00131;
  undefined4 extraout_XMM0_Db_x00132;
  undefined4 extraout_XMM0_Db_x00133;
  undefined4 extraout_XMM0_Db_x00134;
  undefined4 extraout_XMM0_Db_x00135;
  undefined4 extraout_XMM0_Db_x00136;
  undefined4 extraout_XMM0_Db_x00137;
  undefined4 extraout_XMM0_Db_x00138;
  undefined4 extraout_XMM0_Db_x00139;
  undefined4 extraout_XMM0_Db_x00140;
  undefined4 extraout_XMM0_Db_x00141;
  undefined4 extraout_XMM0_Db_x00142;
  undefined4 extraout_XMM0_Db_x00143;
  undefined4 extraout_XMM0_Db_x00144;
  undefined4 extraout_XMM0_Db_x00145;
  undefined4 extraout_XMM0_Db_x00146;
  undefined4 extraout_XMM0_Db_x00147;
  undefined4 extraout_XMM0_Db_x00148;
  undefined4 extraout_XMM0_Db_x00149;
  undefined4 extraout_XMM0_Db_x00150;
  undefined4 extraout_XMM0_Db_x00151;
  undefined4 extraout_XMM0_Db_x00152;
  undefined4 extraout_XMM0_Db_x00153;
  undefined4 extraout_XMM0_Db_x00154;
  undefined4 extraout_XMM0_Db_x00155;
  undefined4 extraout_XMM0_Db_x00156;
  undefined4 extraout_XMM0_Db_x00157;
  undefined4 extraout_XMM0_Db_x00158;
  undefined4 extraout_XMM0_Db_x00159;
  undefined4 extraout_XMM0_Db_x00160;
  undefined4 extraout_XMM0_Db_x00161;
  undefined4 extraout_XMM0_Db_x00162;
  undefined4 extraout_XMM0_Db_x00163;
  undefined4 extraout_XMM0_Db_x00164;
  undefined4 extraout_XMM0_Db_x00165;
  undefined4 extraout_XMM0_Db_x00166;
  undefined4 extraout_XMM0_Db_x00167;
  undefined4 extraout_XMM0_Db_x00168;
  undefined4 extraout_XMM0_Db_x00169;
  undefined4 extraout_XMM0_Db_x00170;
  undefined4 extraout_XMM0_Db_x00171;
  undefined4 extraout_XMM0_Db_x00172;
  undefined4 extraout_XMM0_Db_x00173;
  undefined4 extraout_XMM0_Db_x00174;
  undefined4 extraout_XMM0_Db_x00175;
  undefined4 extraout_XMM0_Db_x00176;
  undefined4 extraout_XMM0_Db_x00177;
  undefined4 extraout_XMM0_Db_x00178;
  undefined4 extraout_XMM0_Db_x00179;
  undefined4 extraout_XMM0_Db_x00180;
  undefined4 extraout_XMM0_Db_x00181;
  undefined4 extraout_XMM0_Db_x00182;
  undefined4 extraout_XMM0_Db_x00183;
  undefined4 extraout_XMM0_Db_x00184;
  undefined4 extraout_XMM0_Db_x00185;
  undefined4 extraout_XMM0_Db_x00186;
  undefined4 extraout_XMM0_Db_x00187;
  undefined4 extraout_XMM0_Db_x00188;
  undefined4 extraout_XMM0_Db_x00189;
  undefined4 extraout_XMM0_Db_x00190;
  undefined4 extraout_XMM0_Db_x00191;
  undefined4 extraout_XMM0_Db_x00192;
  undefined4 extraout_XMM0_Db_x00193;
  undefined4 extraout_XMM0_Db_x00194;
  undefined4 extraout_XMM0_Db_x00195;
  undefined4 extraout_XMM0_Db_x00196;
  undefined4 extraout_XMM0_Db_x00197;
  undefined4 extraout_XMM0_Db_x00198;
  undefined4 extraout_XMM0_Db_x00199;
  undefined4 extraout_XMM0_Db_x00200;
  undefined4 extraout_XMM0_Db_x00201;
  undefined4 extraout_XMM0_Db_x00202;
  undefined4 extraout_XMM0_Db_x00203;
  undefined4 extraout_XMM0_Db_x00204;
  undefined4 extraout_XMM0_Db_x00205;
  undefined4 extraout_XMM0_Db_x00206;
  undefined4 extraout_XMM0_Db_x00207;
  undefined4 extraout_XMM0_Db_x00208;
  undefined4 extraout_XMM0_Db_x00209;
  undefined4 extraout_XMM0_Db_x00210;
  undefined4 extraout_XMM0_Db_x00211;
  undefined4 extraout_XMM0_Db_x00212;
  undefined4 extraout_XMM0_Db_x00213;
  undefined4 extraout_XMM0_Db_x00214;
  undefined4 extraout_XMM0_Db_x00215;
  undefined4 extraout_XMM0_Db_x00216;
  undefined4 extraout_XMM0_Db_x00217;
  undefined4 extraout_XMM0_Db_x00218;
  undefined4 extraout_XMM0_Db_x00219;
  undefined4 extraout_XMM0_Db_x00220;
  undefined4 extraout_XMM0_Db_x00221;
  undefined4 extraout_XMM0_Db_x00222;
  undefined4 extraout_XMM0_Db_x00223;
  undefined4 extraout_XMM0_Db_x00224;
  undefined4 extraout_XMM0_Db_x00225;
  undefined4 extraout_XMM0_Db_x00226;
  undefined4 extraout_XMM0_Db_x00227;
  undefined4 extraout_XMM0_Db_x00228;
  undefined4 extraout_XMM0_Db_x00229;
  undefined4 extraout_XMM0_Db_x00230;
  undefined4 extraout_XMM0_Db_x00231;
  undefined4 extraout_XMM0_Db_x00232;
  undefined4 extraout_XMM0_Db_x00233;
  undefined4 extraout_XMM0_Db_x00234;
  undefined4 extraout_XMM0_Db_x00235;
  undefined4 extraout_XMM0_Db_x00236;
  undefined4 extraout_XMM0_Db_x00237;
  undefined4 extraout_XMM0_Db_x00238;
  undefined4 extraout_XMM0_Db_x00239;
  undefined4 extraout_XMM0_Db_x00240;
  undefined4 extraout_XMM0_Db_x00241;
  undefined4 extraout_XMM0_Db_x00242;
  undefined4 extraout_XMM0_Db_x00243;
  undefined4 extraout_XMM0_Db_x00244;
  undefined4 extraout_XMM0_Db_x00245;
  undefined4 extraout_XMM0_Db_x00246;
  undefined4 extraout_XMM0_Db_x00247;
  undefined4 extraout_XMM0_Db_x00248;
  undefined4 extraout_XMM0_Db_x00249;
  undefined4 extraout_XMM0_Db_x00250;
  undefined4 extraout_XMM0_Db_x00251;
  undefined4 extraout_XMM0_Db_x00252;
  undefined4 extraout_XMM0_Db_x00253;
  undefined4 extraout_XMM0_Db_x00254;
  undefined4 extraout_XMM0_Db_x00255;
  undefined4 extraout_XMM0_Db_x00256;
  undefined4 extraout_XMM0_Db_x00257;
  undefined4 extraout_XMM0_Db_x00258;
  undefined4 extraout_XMM0_Db_x00259;
  undefined4 extraout_XMM0_Db_x00260;
  undefined4 extraout_XMM0_Db_x00261;
  undefined4 extraout_XMM0_Db_x00262;
  undefined4 extraout_XMM0_Db_x00263;
  undefined4 extraout_XMM0_Db_x00264;
  undefined4 extraout_XMM0_Db_x00265;
  undefined4 extraout_XMM0_Db_x00266;
  undefined4 extraout_XMM0_Db_x00267;
  undefined4 extraout_XMM0_Db_x00268;
  undefined4 extraout_XMM0_Db_x00269;
  undefined4 extraout_XMM0_Db_x00270;
  undefined4 extraout_XMM0_Db_x00271;
  undefined4 extraout_XMM0_Db_x00272;
  undefined4 extraout_XMM0_Db_x00273;
  undefined4 extraout_XMM0_Db_x00274;
  undefined4 extraout_XMM0_Db_x00275;
  undefined4 extraout_XMM0_Db_x00276;
  undefined4 extraout_XMM0_Db_x00277;
  undefined4 extraout_XMM0_Db_x00278;
  undefined4 extraout_XMM0_Db_x00279;
  undefined4 extraout_XMM0_Db_x00280;
  undefined4 extraout_XMM0_Db_x00281;
  undefined4 extraout_XMM0_Db_x00282;
  undefined4 extraout_XMM0_Db_x00283;
  undefined4 extraout_XMM0_Db_x00284;
  undefined4 extraout_XMM0_Db_x00285;
  undefined4 extraout_XMM0_Db_x00286;
  undefined4 extraout_XMM0_Db_x00287;
  undefined4 extraout_XMM0_Db_x00288;
  undefined4 extraout_XMM0_Db_x00289;
  undefined4 extraout_XMM0_Db_x00290;
  undefined4 extraout_XMM0_Db_x00291;
  undefined4 extraout_XMM0_Db_x00292;
  undefined4 extraout_XMM0_Db_x00293;
  undefined4 extraout_XMM0_Db_x00294;
  undefined4 extraout_XMM0_Db_x00295;
  undefined4 extraout_XMM0_Db_x00296;
  undefined4 extraout_XMM0_Db_x00297;
  undefined4 extraout_XMM0_Db_x00298;
  undefined4 extraout_XMM0_Db_x00299;
  undefined4 extraout_XMM0_Db_x00300;
  undefined4 extraout_XMM0_Db_x00301;
  undefined4 extraout_XMM0_Db_x00302;
  undefined4 extraout_XMM0_Db_x00303;
  undefined4 extraout_XMM0_Db_x00304;
  undefined4 extraout_XMM0_Db_x00305;
  undefined4 extraout_XMM0_Db_x00306;
  undefined4 extraout_XMM0_Db_x00307;
  undefined4 extraout_XMM0_Db_x00308;
  undefined4 extraout_XMM0_Db_x00309;
  undefined4 extraout_XMM0_Db_x00310;
  undefined4 extraout_XMM0_Db_x00311;
  undefined4 extraout_XMM0_Db_x00312;
  undefined4 extraout_XMM0_Db_x00313;
  undefined4 extraout_XMM0_Db_x00314;
  undefined4 extraout_XMM0_Db_x00315;
  undefined4 extraout_XMM0_Db_x00316;
  undefined4 extraout_XMM0_Db_x00317;
  undefined4 extraout_XMM0_Db_x00318;
  undefined4 extraout_XMM0_Db_x00319;
  undefined4 extraout_XMM0_Db_x00320;
  undefined4 extraout_XMM0_Db_x00321;
  undefined4 extraout_XMM0_Db_x00322;
  undefined4 extraout_XMM0_Db_x00323;
  undefined4 extraout_XMM0_Db_x00324;
  undefined4 extraout_XMM0_Db_x00325;
  undefined4 extraout_XMM0_Db_x00326;
  undefined4 extraout_XMM0_Db_x00327;
  undefined4 extraout_XMM0_Db_x00328;
  undefined4 extraout_XMM0_Db_x00329;
  undefined4 extraout_XMM0_Db_x00330;
  undefined4 extraout_XMM0_Db_x00331;
  undefined4 extraout_XMM0_Db_x00332;
  undefined4 extraout_XMM0_Db_x00333;
  undefined4 extraout_XMM0_Db_x00334;
  undefined4 extraout_XMM0_Db_x00335;
  undefined4 extraout_XMM0_Db_x00336;
  undefined4 extraout_XMM0_Db_x00337;
  undefined4 extraout_XMM0_Db_x00338;
  undefined4 extraout_XMM0_Db_x00339;
  undefined4 extraout_XMM0_Db_x00340;
  undefined4 extraout_XMM0_Db_x00341;
  undefined4 extraout_XMM0_Db_x00342;
  undefined4 extraout_XMM0_Db_x00343;
  undefined4 extraout_XMM0_Db_x00344;
  undefined4 extraout_XMM0_Db_x00345;
  undefined4 extraout_XMM0_Db_x00346;
  undefined4 extraout_XMM0_Db_x00347;
  undefined4 extraout_XMM0_Db_x00348;
  undefined4 extraout_XMM0_Db_x00349;
  undefined4 extraout_XMM0_Db_x00350;
  undefined4 extraout_XMM0_Db_x00351;
  undefined4 extraout_XMM0_Db_x00352;
  undefined4 extraout_XMM0_Db_x00353;
  undefined4 extraout_XMM0_Db_x00354;
  undefined4 extraout_XMM0_Db_x00355;
  undefined4 extraout_XMM0_Db_x00356;
  undefined4 extraout_XMM0_Db_x00357;
  undefined4 extraout_XMM0_Db_x00358;
  undefined4 extraout_XMM0_Db_x00359;
  undefined4 extraout_XMM0_Db_x00360;
  undefined4 extraout_XMM0_Db_x00361;
  undefined4 extraout_XMM0_Db_x00362;
  undefined4 extraout_XMM0_Db_x00363;
  undefined4 extraout_XMM0_Db_x00364;
  undefined4 extraout_XMM0_Db_x00365;
  undefined4 extraout_XMM0_Db_x00366;
  undefined4 extraout_XMM0_Db_x00367;
  undefined4 extraout_XMM0_Db_x00368;
  undefined4 extraout_XMM0_Db_x00369;
  undefined4 extraout_XMM0_Db_x00370;
  undefined4 extraout_XMM0_Db_x00371;
  undefined4 extraout_XMM0_Db_x00372;
  undefined4 extraout_XMM0_Db_x00373;
  undefined4 extraout_XMM0_Db_x00374;
  undefined4 extraout_XMM0_Db_x00375;
  undefined4 extraout_XMM0_Db_x00376;
  undefined4 extraout_XMM0_Db_x00377;
  undefined4 extraout_XMM0_Db_x00378;
  undefined4 extraout_XMM0_Db_x00379;
  undefined4 extraout_XMM0_Db_x00380;
  undefined4 extraout_XMM0_Db_x00381;
  undefined4 extraout_XMM0_Db_x00382;
  undefined4 extraout_XMM0_Db_x00383;
  undefined4 extraout_XMM0_Db_x00384;
  undefined4 extraout_XMM0_Db_x00385;
  undefined4 extraout_XMM0_Db_x00386;
  undefined4 extraout_XMM0_Db_x00387;
  undefined4 extraout_XMM0_Db_x00388;
  undefined4 extraout_XMM0_Db_x00389;
  undefined4 extraout_XMM0_Db_x00390;
  undefined4 extraout_XMM0_Db_x00391;
  undefined4 extraout_XMM0_Db_x00392;
  undefined4 extraout_XMM0_Db_x00393;
  undefined4 extraout_XMM0_Db_x00394;
  undefined4 extraout_XMM0_Db_x00395;
  undefined4 extraout_XMM0_Db_x00396;
  undefined4 extraout_XMM0_Db_x00397;
  undefined4 extraout_XMM0_Db_x00398;
  undefined4 extraout_XMM0_Db_x00399;
  undefined4 extraout_XMM0_Db_x00400;
  undefined4 extraout_XMM0_Db_x00401;
  undefined4 extraout_XMM0_Db_x00402;
  undefined4 extraout_XMM0_Db_x00403;
  undefined4 extraout_XMM0_Db_x00404;
  undefined4 extraout_XMM0_Db_x00405;
  undefined4 extraout_XMM0_Db_x00406;
  undefined4 extraout_XMM0_Db_x00407;
  undefined4 extraout_XMM0_Db_x00408;
  undefined4 extraout_XMM0_Db_x00409;
  undefined4 extraout_XMM0_Db_x00410;
  undefined4 extraout_XMM0_Db_x00411;
  undefined4 extraout_XMM0_Db_x00412;
  undefined4 extraout_XMM0_Db_x00413;
  undefined4 extraout_XMM0_Db_x00414;
  undefined4 extraout_XMM0_Db_x00415;
  undefined4 extraout_XMM0_Db_x00416;
  undefined4 extraout_XMM0_Db_x00417;
  undefined4 extraout_XMM0_Db_x00418;
  undefined4 extraout_XMM0_Db_x00419;
  undefined4 extraout_XMM0_Db_x00420;
  undefined4 extraout_XMM0_Db_x00421;
  undefined4 extraout_XMM0_Db_x00422;
  undefined4 extraout_XMM0_Db_x00423;
  undefined4 extraout_XMM0_Db_x00424;
  undefined4 extraout_XMM0_Db_x00425;
  undefined4 extraout_XMM0_Db_x00426;
  undefined4 extraout_XMM0_Db_x00427;
  undefined4 extraout_XMM0_Db_x00428;
  undefined4 extraout_XMM0_Db_x00429;
  undefined4 extraout_XMM0_Db_x00430;
  undefined4 extraout_XMM0_Db_x00431;
  undefined4 extraout_XMM0_Db_x00432;
  undefined4 extraout_XMM0_Db_x00433;
  undefined4 extraout_XMM0_Db_x00434;
  undefined4 extraout_XMM0_Db_x00435;
  undefined4 extraout_XMM0_Db_x00436;
  undefined4 extraout_XMM0_Db_x00437;
  undefined4 extraout_XMM0_Db_x00438;
  undefined4 extraout_XMM0_Db_x00439;
  undefined4 extraout_XMM0_Db_x00440;
  undefined4 extraout_XMM0_Db_x00441;
  undefined4 extraout_XMM0_Db_x00442;
  undefined4 extraout_XMM0_Db_x00443;
  undefined4 extraout_XMM0_Db_x00444;
  undefined4 extraout_XMM0_Db_x00445;
  undefined4 extraout_XMM0_Db_x00446;
  undefined4 extraout_XMM0_Db_x00447;
  undefined4 extraout_XMM0_Db_x00448;
  undefined4 extraout_XMM0_Db_x00449;
  undefined4 extraout_XMM0_Db_x00450;
  undefined4 extraout_XMM0_Db_x00451;
  undefined4 extraout_XMM0_Db_x00452;
  undefined4 extraout_XMM0_Db_x00453;
  undefined4 extraout_XMM0_Db_x00454;
  undefined4 extraout_XMM0_Db_x00455;
  undefined4 extraout_XMM0_Db_x00456;
  undefined4 extraout_XMM0_Db_x00457;
  undefined4 extraout_XMM0_Db_x00458;
  undefined4 extraout_XMM0_Db_x00459;
  undefined4 extraout_XMM0_Db_x00460;
  undefined4 extraout_XMM0_Db_x00461;
  undefined4 extraout_XMM0_Db_x00462;
  undefined4 extraout_XMM0_Db_x00463;
  undefined4 extraout_XMM0_Db_x00464;
  undefined4 extraout_XMM0_Db_x00465;
  undefined4 extraout_XMM0_Db_x00466;
  undefined4 extraout_XMM0_Db_x00467;
  undefined4 extraout_XMM0_Db_x00468;
  undefined4 extraout_XMM0_Db_x00469;
  undefined4 extraout_XMM0_Db_x00470;
  undefined4 extraout_XMM0_Db_x00471;
  undefined4 extraout_XMM0_Db_x00472;
  undefined4 extraout_XMM0_Db_x00473;
  undefined4 extraout_XMM0_Db_x00474;
  undefined4 extraout_XMM0_Db_x00475;
  undefined4 extraout_XMM0_Db_x00476;
  undefined4 extraout_XMM0_Db_x00477;
  undefined4 extraout_XMM0_Db_x00478;
  undefined4 extraout_XMM0_Db_x00479;
  undefined4 extraout_XMM0_Db_x00480;
  undefined4 extraout_XMM0_Db_x00481;
  undefined4 extraout_XMM0_Db_x00482;
  undefined4 extraout_XMM0_Db_x00483;
  undefined4 extraout_XMM0_Db_x00484;
  undefined4 extraout_XMM0_Db_x00485;
  undefined4 extraout_XMM0_Db_x00486;
  undefined4 extraout_XMM0_Db_x00487;
  undefined4 extraout_XMM0_Db_x00488;
  undefined4 extraout_XMM0_Db_x00489;
  undefined4 extraout_XMM0_Db_x00490;
  undefined4 extraout_XMM0_Db_x00491;
  undefined4 extraout_XMM0_Db_x00492;
  undefined4 extraout_XMM0_Db_x00493;
  undefined4 extraout_XMM0_Db_x00494;
  undefined4 extraout_XMM0_Db_x00495;
  undefined4 extraout_XMM0_Db_x00496;
  undefined4 extraout_XMM0_Db_x00497;
  undefined4 extraout_XMM0_Db_x00498;
  undefined4 extraout_XMM0_Db_x00499;
  undefined4 extraout_XMM0_Db_x00500;
  undefined4 extraout_XMM0_Db_x00501;
  undefined4 extraout_XMM0_Db_x00502;
  undefined4 extraout_XMM0_Db_x00503;
  undefined4 extraout_XMM0_Db_x00504;
  undefined4 extraout_XMM0_Db_x00505;
  undefined4 extraout_XMM0_Db_x00506;
  undefined4 extraout_XMM0_Db_x00507;
  undefined4 extraout_XMM0_Db_x00508;
  undefined4 extraout_XMM0_Db_x00509;
  undefined4 extraout_XMM0_Db_x00510;
  undefined4 extraout_XMM0_Db_x00511;
  undefined4 extraout_XMM0_Db_x00512;
  undefined4 extraout_XMM0_Db_x00513;
  undefined4 extraout_XMM0_Db_x00514;
  undefined4 extraout_XMM0_Db_x00515;
  undefined4 extraout_XMM0_Db_x00516;
  undefined4 extraout_XMM0_Db_x00517;
  undefined4 extraout_XMM0_Db_x00518;
  undefined4 extraout_XMM0_Db_x00519;
  undefined4 extraout_XMM0_Db_x00520;
  undefined4 extraout_XMM0_Db_x00521;
  undefined4 extraout_XMM0_Db_x00522;
  undefined4 extraout_XMM0_Db_x00523;
  undefined4 extraout_XMM0_Db_x00524;
  undefined4 extraout_XMM0_Db_x00525;
  undefined4 extraout_XMM0_Db_x00526;
  undefined4 extraout_XMM0_Db_x00527;
  undefined4 extraout_XMM0_Db_x00528;
  undefined4 extraout_XMM0_Db_x00529;
  undefined4 extraout_XMM0_Db_x00530;
  undefined4 extraout_XMM0_Db_x00531;
  undefined4 extraout_XMM0_Db_x00532;
  undefined4 extraout_XMM0_Db_x00533;
  undefined4 extraout_XMM0_Db_x00534;
  undefined4 extraout_XMM0_Db_x00535;
  undefined4 extraout_XMM0_Db_x00536;
  undefined4 extraout_XMM0_Db_x00537;
  undefined4 extraout_XMM0_Db_x00538;
  undefined4 extraout_XMM0_Db_x00539;
  undefined4 extraout_XMM0_Db_x00540;
  undefined4 extraout_XMM0_Db_x00541;
  undefined4 extraout_XMM0_Db_x00542;
  undefined4 extraout_XMM0_Db_x00543;
  undefined4 extraout_XMM0_Db_x00544;
  undefined4 extraout_XMM0_Db_x00545;
  undefined4 extraout_XMM0_Db_x00546;
  undefined4 extraout_XMM0_Db_x00547;
  undefined4 extraout_XMM0_Db_x00548;
  undefined4 extraout_XMM0_Db_x00549;
  undefined4 extraout_XMM0_Db_x00550;
  undefined4 extraout_XMM0_Db_x00551;
  undefined4 extraout_XMM0_Db_x00552;
  undefined4 extraout_XMM0_Db_x00553;
  undefined4 extraout_XMM0_Db_x00554;
  undefined4 extraout_XMM0_Db_x00555;
  undefined4 extraout_XMM0_Db_x00556;
  undefined4 extraout_XMM0_Db_x00557;
  undefined4 extraout_XMM0_Db_x00558;
  undefined4 extraout_XMM0_Db_x00559;
  undefined4 extraout_XMM0_Db_x00560;
  undefined4 extraout_XMM0_Db_x00561;
  undefined4 extraout_XMM0_Db_x00562;
  undefined4 extraout_XMM0_Db_x00563;
  undefined4 extraout_XMM0_Db_x00564;
  undefined4 extraout_XMM0_Db_x00565;
  undefined4 extraout_XMM0_Db_x00566;
  undefined4 extraout_XMM0_Db_x00567;
  undefined4 extraout_XMM0_Db_x00568;
  undefined4 extraout_XMM0_Db_x00569;
  undefined4 extraout_XMM0_Db_x00570;
  undefined4 extraout_XMM0_Db_x00571;
  undefined4 extraout_XMM0_Db_x00572;
  undefined4 extraout_XMM0_Db_x00573;
  undefined4 extraout_XMM0_Db_x00574;
  undefined4 extraout_XMM0_Db_x00575;
  undefined4 extraout_XMM0_Db_x00576;
  undefined4 extraout_XMM0_Db_x00577;
  undefined4 extraout_XMM0_Db_x00578;
  undefined4 extraout_XMM0_Db_x00579;
  undefined4 extraout_XMM0_Db_x00580;
  undefined4 extraout_XMM0_Db_x00581;
  undefined4 extraout_XMM0_Db_x00582;
  undefined4 extraout_XMM0_Db_x00583;
  undefined4 extraout_XMM0_Db_x00584;
  undefined4 extraout_XMM0_Db_x00585;
  undefined4 extraout_XMM0_Db_x00586;
  undefined4 extraout_XMM0_Db_x00587;
  undefined4 extraout_XMM0_Db_x00588;
  undefined4 extraout_XMM0_Db_x00589;
  undefined4 extraout_XMM0_Db_x00590;
  undefined4 extraout_XMM0_Db_x00591;
  undefined4 extraout_XMM0_Db_x00592;
  undefined4 extraout_XMM0_Db_x00593;
  undefined4 extraout_XMM0_Db_x00594;
  undefined4 extraout_XMM0_Db_x00595;
  undefined4 extraout_XMM0_Db_x00596;
  undefined4 extraout_XMM0_Db_x00597;
  undefined4 extraout_XMM0_Db_x00598;
  undefined4 extraout_XMM0_Db_x00599;
  undefined4 extraout_XMM0_Db_x00600;
  undefined4 extraout_XMM0_Db_x00601;
  undefined4 extraout_XMM0_Db_x00602;
  undefined4 extraout_XMM0_Db_x00603;
  undefined4 extraout_XMM0_Db_x00604;
  undefined4 extraout_XMM0_Db_x00605;
  undefined4 extraout_XMM0_Db_x00606;
  undefined4 extraout_XMM0_Db_x00607;
  undefined4 extraout_XMM0_Db_x00608;
  undefined4 extraout_XMM0_Db_x00609;
  undefined4 extraout_XMM0_Db_x00610;
  undefined4 extraout_XMM0_Db_x00611;
  undefined4 extraout_XMM0_Db_x00612;
  undefined4 extraout_XMM0_Db_x00613;
  undefined4 extraout_XMM0_Db_x00614;
  undefined4 extraout_XMM0_Db_x00615;
  undefined4 extraout_XMM0_Db_x00616;
  undefined4 extraout_XMM0_Db_x00617;
  undefined4 extraout_XMM0_Db_x00618;
  undefined4 extraout_XMM0_Db_x00619;
  undefined4 extraout_XMM0_Db_x00620;
  undefined4 extraout_XMM0_Db_x00621;
  undefined4 extraout_XMM0_Db_x00622;
  undefined4 extraout_XMM0_Db_x00623;
  undefined4 extraout_XMM0_Db_x00624;
  undefined4 extraout_XMM0_Db_x00625;
  undefined4 extraout_XMM0_Db_x00626;
  undefined4 extraout_XMM0_Db_x00627;
  undefined4 extraout_XMM0_Db_x00628;
  undefined4 extraout_XMM0_Db_x00629;
  undefined4 extraout_XMM0_Db_x00630;
  undefined4 extraout_XMM0_Db_x00631;
  undefined4 extraout_XMM0_Db_x00632;
  undefined4 extraout_XMM0_Db_x00633;
  undefined4 extraout_XMM0_Db_x00634;
  undefined4 extraout_XMM0_Db_x00635;
  undefined4 extraout_XMM0_Db_x00636;
  undefined4 extraout_XMM0_Db_x00637;
  undefined4 extraout_XMM0_Db_x00638;
  undefined4 extraout_XMM0_Db_x00639;
  undefined4 extraout_XMM0_Db_x00640;
  undefined4 extraout_XMM0_Db_x00641;
  undefined4 extraout_XMM0_Db_x00642;
  undefined4 extraout_XMM0_Db_x00643;
  undefined4 extraout_XMM0_Db_x00644;
  undefined4 extraout_XMM0_Db_x00645;
  undefined4 extraout_XMM0_Db_x00646;
  undefined4 extraout_XMM0_Db_x00647;
  undefined4 extraout_XMM0_Db_x00648;
  undefined4 extraout_XMM0_Db_x00649;
  undefined4 extraout_XMM0_Db_x00650;
  undefined4 extraout_XMM0_Db_x00651;
  undefined4 extraout_XMM0_Db_x00652;
  undefined4 extraout_XMM0_Db_x00653;
  undefined4 extraout_XMM0_Db_x00654;
  undefined4 extraout_XMM0_Db_x00655;
  undefined4 extraout_XMM0_Db_x00656;
  undefined4 extraout_XMM0_Db_x00657;
  undefined4 extraout_XMM0_Db_x00658;
  undefined4 extraout_XMM0_Db_x00659;
  undefined4 extraout_XMM0_Db_x00660;
  undefined4 extraout_XMM0_Db_x00661;
  undefined4 extraout_XMM0_Db_x00662;
  undefined4 extraout_XMM0_Db_x00663;
  undefined4 extraout_XMM0_Db_x00664;
  undefined4 extraout_XMM0_Db_x00665;
  undefined4 extraout_XMM0_Db_x00666;
  undefined4 extraout_XMM0_Db_x00667;
  undefined4 extraout_XMM0_Db_x00668;
  undefined4 extraout_XMM0_Db_x00669;
  undefined4 extraout_XMM0_Db_x00670;
  undefined4 extraout_XMM0_Db_x00671;
  undefined4 extraout_XMM0_Db_x00672;
  undefined4 extraout_XMM0_Db_x00673;
  undefined4 extraout_XMM0_Db_x00674;
  undefined4 extraout_XMM0_Db_x00675;
  undefined4 extraout_XMM0_Db_x00676;
  undefined4 extraout_XMM0_Db_x00677;
  undefined4 extraout_XMM0_Db_x00678;
  undefined4 extraout_XMM0_Db_x00679;
  undefined4 extraout_XMM0_Db_x00680;
  undefined4 extraout_XMM0_Db_x00681;
  undefined4 extraout_XMM0_Db_x00682;
  undefined4 extraout_XMM0_Db_x00683;
  undefined4 extraout_XMM0_Db_x00684;
  undefined4 extraout_XMM0_Db_x00685;
  undefined4 extraout_XMM0_Db_x00686;
  undefined4 extraout_XMM0_Db_x00687;
  undefined4 extraout_XMM0_Db_x00688;
  undefined4 extraout_XMM0_Db_x00689;
  undefined4 extraout_XMM0_Db_x00690;
  undefined4 extraout_XMM0_Db_x00691;
  undefined4 extraout_XMM0_Db_x00692;
  undefined4 extraout_XMM0_Db_x00693;
  undefined4 extraout_XMM0_Db_x00694;
  undefined4 extraout_XMM0_Db_x00695;
  undefined4 extraout_XMM0_Db_x00696;
  undefined4 extraout_XMM0_Db_x00697;
  undefined4 extraout_XMM0_Db_x00698;
  undefined4 extraout_XMM0_Db_x00699;
  undefined4 extraout_XMM0_Db_x00700;
  undefined4 extraout_XMM0_Db_x00701;
  undefined4 extraout_XMM0_Db_x00702;
  undefined4 extraout_XMM0_Db_x00703;
  undefined4 extraout_XMM0_Db_x00704;
  undefined4 extraout_XMM0_Db_x00705;
  undefined4 extraout_XMM0_Db_x00706;
  undefined4 extraout_XMM0_Db_x00707;
  undefined4 extraout_XMM0_Db_x00708;
  undefined4 extraout_XMM0_Db_x00709;
  undefined4 extraout_XMM0_Db_x00710;
  undefined4 extraout_XMM0_Db_x00711;
  undefined4 extraout_XMM0_Db_x00712;
  undefined4 extraout_XMM0_Db_x00713;
  undefined4 extraout_XMM0_Db_x00714;
  undefined4 extraout_XMM0_Db_x00715;
  undefined4 extraout_XMM0_Db_x00716;
  undefined4 extraout_XMM0_Db_x00717;
  undefined4 extraout_XMM0_Db_x00718;
  undefined4 extraout_XMM0_Db_x00719;
  undefined4 extraout_XMM0_Db_x00720;
  undefined4 extraout_XMM0_Db_x00721;
  undefined4 extraout_XMM0_Db_x00722;
  undefined4 extraout_XMM0_Db_x00723;
  undefined4 extraout_XMM0_Db_x00724;
  undefined4 extraout_XMM0_Db_x00725;
  undefined4 extraout_XMM0_Db_x00726;
  undefined4 extraout_XMM0_Db_x00727;
  undefined4 extraout_XMM0_Db_x00728;
  undefined4 extraout_XMM0_Db_x00729;
  undefined4 extraout_XMM0_Db_x00730;
  undefined4 extraout_XMM0_Db_x00731;
  undefined4 extraout_XMM0_Db_x00732;
  undefined4 extraout_XMM0_Db_x00733;
  undefined4 extraout_XMM0_Db_x00734;
  undefined4 extraout_XMM0_Db_x00735;
  undefined4 extraout_XMM0_Db_x00736;
  undefined4 extraout_XMM0_Db_x00737;
  undefined4 extraout_XMM0_Db_x00738;
  undefined4 extraout_XMM0_Db_x00739;
  undefined4 extraout_XMM0_Db_x00740;
  undefined4 extraout_XMM0_Db_x00741;
  undefined4 extraout_XMM0_Db_x00742;
  undefined4 extraout_XMM0_Db_x00743;
  undefined4 extraout_XMM0_Db_x00744;
  undefined4 extraout_XMM0_Db_x00745;
  undefined4 extraout_XMM0_Db_x00746;
  undefined4 extraout_XMM0_Db_x00747;
  undefined4 extraout_XMM0_Db_x00748;
  undefined4 extraout_XMM0_Db_x00749;
  undefined4 extraout_XMM0_Db_x00750;
  undefined4 extraout_XMM0_Db_x00751;
  undefined4 extraout_XMM0_Db_x00752;
  undefined4 extraout_XMM0_Db_x00753;
  undefined4 extraout_XMM0_Db_x00754;
  undefined4 extraout_XMM0_Db_x00755;
  undefined4 extraout_XMM0_Db_x00756;
  undefined4 extraout_XMM0_Db_x00757;
  undefined4 extraout_XMM0_Db_x00758;
  undefined4 extraout_XMM0_Db_x00759;
  undefined4 extraout_XMM0_Db_x00760;
  undefined4 extraout_XMM0_Db_x00761;
  undefined4 extraout_XMM0_Db_x00762;
  undefined4 extraout_XMM0_Db_x00763;
  undefined4 extraout_XMM0_Db_x00764;
  undefined4 extraout_XMM0_Db_x00765;
  undefined4 extraout_XMM0_Db_x00766;
  undefined4 extraout_XMM0_Db_x00767;
  undefined4 extraout_XMM0_Db_x00768;
  undefined4 extraout_XMM0_Db_x00769;
  undefined4 extraout_XMM0_Db_x00770;
  undefined4 extraout_XMM0_Db_x00771;
  undefined4 extraout_XMM0_Db_x00772;
  undefined4 extraout_XMM0_Db_x00773;
  undefined4 extraout_XMM0_Db_x00774;
  undefined4 extraout_XMM0_Db_x00775;
  undefined4 extraout_XMM0_Db_x00776;
  undefined4 extraout_XMM0_Db_x00777;
  undefined4 extraout_XMM0_Db_x00778;
  undefined4 extraout_XMM0_Db_x00779;
  undefined4 extraout_XMM0_Db_x00780;
  undefined4 extraout_XMM0_Db_x00781;
  undefined4 extraout_XMM0_Db_x00782;
  undefined4 extraout_XMM0_Db_x00783;
  undefined4 extraout_XMM0_Db_x00784;
  undefined4 extraout_XMM0_Db_x00785;
  undefined4 extraout_XMM0_Db_x00786;
  undefined4 extraout_XMM0_Db_x00787;
  undefined4 extraout_XMM0_Db_x00788;
  undefined4 extraout_XMM0_Db_x00789;
  undefined4 extraout_XMM0_Db_x00790;
  undefined4 extraout_XMM0_Db_x00791;
  undefined4 extraout_XMM0_Db_x00792;
  undefined4 extraout_XMM0_Db_x00793;
  undefined4 extraout_XMM0_Db_x00794;
  undefined4 extraout_XMM0_Db_x00795;
  undefined4 extraout_XMM0_Db_x00796;
  undefined4 extraout_XMM0_Db_x00797;
  undefined4 extraout_XMM0_Db_x00798;
  undefined4 extraout_XMM0_Db_x00799;
  undefined4 extraout_XMM0_Db_x00800;
  undefined4 extraout_XMM0_Db_x00801;
  undefined4 extraout_XMM0_Db_x00802;
  undefined4 extraout_XMM0_Db_x00803;
  undefined4 extraout_XMM0_Db_x00804;
  undefined4 extraout_XMM0_Db_x00805;
  undefined4 extraout_XMM0_Db_x00806;
  undefined4 extraout_XMM0_Db_x00807;
  undefined4 extraout_XMM0_Db_x00808;
  undefined4 extraout_XMM0_Db_x00809;
  undefined4 extraout_XMM0_Db_x00810;
  undefined4 extraout_XMM0_Db_x00811;
  undefined4 extraout_XMM0_Db_x00812;
  undefined4 extraout_XMM0_Db_x00813;
  undefined4 extraout_XMM0_Db_x00814;
  undefined4 extraout_XMM0_Db_x00815;
  undefined4 extraout_XMM0_Db_x00816;
  undefined4 extraout_XMM0_Db_x00817;
  undefined4 extraout_XMM0_Db_x00818;
  undefined4 extraout_XMM0_Db_x00819;
  undefined4 extraout_XMM0_Db_x00820;
  undefined4 extraout_XMM0_Db_x00821;
  undefined4 extraout_XMM0_Db_x00822;
  undefined4 extraout_XMM0_Db_x00823;
  undefined4 extraout_XMM0_Db_x00824;
  undefined4 extraout_XMM0_Db_x00825;
  undefined4 extraout_XMM0_Db_x00826;
  undefined4 extraout_XMM0_Db_x00827;
  undefined4 extraout_XMM0_Db_x00828;
  undefined4 extraout_XMM0_Db_x00829;
  undefined4 extraout_XMM0_Db_x00830;
  undefined4 extraout_XMM0_Db_x00831;
  undefined4 extraout_XMM0_Db_x00832;
  undefined4 extraout_XMM0_Db_x00833;
  undefined4 extraout_XMM0_Db_x00834;
  undefined4 extraout_XMM0_Db_x00835;
  undefined4 extraout_XMM0_Db_x00836;
  undefined4 extraout_XMM0_Db_x00837;
  undefined4 extraout_XMM0_Db_x00838;
  undefined4 extraout_XMM0_Db_x00839;
  undefined4 extraout_XMM0_Db_x00840;
  undefined4 extraout_XMM0_Db_x00841;
  undefined4 extraout_XMM0_Db_x00842;
  undefined4 extraout_XMM0_Db_x00843;
  undefined4 extraout_XMM0_Db_x00844;
  undefined4 extraout_XMM0_Db_x00845;
  undefined4 extraout_XMM0_Db_x00846;
  undefined4 extraout_XMM0_Db_x00847;
  undefined4 extraout_XMM0_Db_x00848;
  undefined4 extraout_XMM0_Db_x00849;
  undefined4 extraout_XMM0_Db_x00850;
  undefined4 extraout_XMM0_Db_x00851;
  undefined4 extraout_XMM0_Db_x00852;
  undefined4 extraout_XMM0_Db_x00853;
  undefined4 extraout_XMM0_Db_x00854;
  undefined4 extraout_XMM0_Db_x00855;
  undefined4 extraout_XMM0_Db_x00856;
  undefined4 extraout_XMM0_Db_x00857;
  undefined4 extraout_XMM0_Db_x00858;
  undefined4 extraout_XMM0_Db_x00859;
  undefined4 extraout_XMM0_Db_x00860;
  undefined4 extraout_XMM0_Db_x00861;
  undefined4 extraout_XMM0_Db_x00862;
  undefined4 extraout_XMM0_Db_x00863;
  undefined4 extraout_XMM0_Db_x00864;
  undefined4 extraout_XMM0_Db_x00865;
  undefined4 extraout_XMM0_Db_x00866;
  undefined4 extraout_XMM0_Db_x00867;
  undefined4 extraout_XMM0_Db_x00868;
  undefined4 extraout_XMM0_Db_x00869;
  undefined4 extraout_XMM0_Db_x00870;
  undefined4 extraout_XMM0_Db_x00871;
  undefined4 extraout_XMM0_Db_x00872;
  undefined4 extraout_XMM0_Db_x00873;
  undefined4 extraout_XMM0_Db_x00874;
  undefined4 extraout_XMM0_Db_x00875;
  undefined4 extraout_XMM0_Db_x00876;
  undefined4 extraout_XMM0_Db_x00877;
  undefined4 extraout_XMM0_Db_x00878;
  undefined4 extraout_XMM0_Db_x00879;
  undefined4 extraout_XMM0_Db_x00880;
  undefined4 extraout_XMM0_Db_x00881;
  undefined4 extraout_XMM0_Db_x00882;
  undefined4 extraout_XMM0_Db_x00883;
  undefined4 extraout_XMM0_Db_x00884;
  undefined4 extraout_XMM0_Db_x00885;
  undefined4 extraout_XMM0_Db_x00886;
  undefined4 extraout_XMM0_Db_x00887;
  undefined4 extraout_XMM0_Db_x00888;
  undefined4 extraout_XMM0_Db_x00889;
  undefined4 extraout_XMM0_Db_x00890;
  undefined4 extraout_XMM0_Db_x00891;
  undefined4 extraout_XMM0_Db_x00892;
  undefined4 extraout_XMM0_Db_x00893;
  undefined4 extraout_XMM0_Db_x00894;
  undefined4 extraout_XMM0_Db_x00895;
  undefined4 extraout_XMM0_Db_x00896;
  undefined4 extraout_XMM0_Db_x00897;
  undefined4 extraout_XMM0_Db_x00898;
  undefined4 extraout_XMM0_Db_x00899;
  undefined4 extraout_XMM0_Db_x00900;
  undefined4 extraout_XMM0_Db_x00901;
  undefined4 extraout_XMM0_Db_x00902;
  undefined4 extraout_XMM0_Db_x00903;
  undefined4 extraout_XMM0_Db_x00904;
  undefined4 extraout_XMM0_Db_x00905;
  undefined4 extraout_XMM0_Db_x00906;
  undefined4 extraout_XMM0_Db_x00907;
  undefined4 extraout_XMM0_Db_x00908;
  undefined4 extraout_XMM0_Db_x00909;
  undefined4 extraout_XMM0_Db_x00910;
  undefined4 extraout_XMM0_Db_x00911;
  undefined4 extraout_XMM0_Db_x00912;
  undefined4 extraout_XMM0_Db_x00913;
  undefined4 extraout_XMM0_Db_x00914;
  undefined4 extraout_XMM0_Db_x00915;
  undefined4 extraout_XMM0_Db_x00916;
  undefined4 extraout_XMM0_Db_x00917;
  undefined4 extraout_XMM0_Db_x00918;
  undefined4 extraout_XMM0_Db_x00919;
  undefined4 extraout_XMM0_Db_x00920;
  undefined4 extraout_XMM0_Db_x00921;
  undefined4 extraout_XMM0_Db_x00922;
  undefined4 extraout_XMM0_Db_x00923;
  undefined4 extraout_XMM0_Db_x00924;
  undefined4 extraout_XMM0_Db_x00925;
  undefined4 extraout_XMM0_Db_x00926;
  undefined4 extraout_XMM0_Db_x00927;
  undefined4 extraout_XMM0_Db_x00928;
  undefined4 extraout_XMM0_Db_x00929;
  undefined4 extraout_XMM0_Db_x00930;
  undefined4 extraout_XMM0_Db_x00931;
  undefined4 extraout_XMM0_Db_x00932;
  undefined4 extraout_XMM0_Db_x00933;
  undefined4 extraout_XMM0_Db_x00934;
  undefined4 extraout_XMM0_Db_x00935;
  undefined4 extraout_XMM0_Db_x00936;
  undefined4 extraout_XMM0_Db_x00937;
  undefined4 extraout_XMM0_Db_x00938;
  undefined4 extraout_XMM0_Db_x00939;
  undefined4 extraout_XMM0_Db_x00940;
  undefined4 extraout_XMM0_Db_x00941;
  undefined4 extraout_XMM0_Db_x00942;
  undefined4 extraout_XMM0_Db_x00943;
  undefined4 extraout_XMM0_Db_x00944;
  undefined4 extraout_XMM0_Db_x00945;
  undefined4 extraout_XMM0_Db_x00946;
  undefined4 extraout_XMM0_Db_x00947;
  undefined4 extraout_XMM0_Db_x00948;
  undefined4 extraout_XMM0_Db_x00949;
  undefined4 extraout_XMM0_Db_x00950;
  undefined4 extraout_XMM0_Db_x00951;
  undefined4 extraout_XMM0_Db_x00952;
  undefined4 extraout_XMM0_Db_x00953;
  undefined4 extraout_XMM0_Db_x00954;
  undefined4 extraout_XMM0_Db_x00955;
  undefined4 extraout_XMM0_Db_x00956;
  undefined4 extraout_XMM0_Db_x00957;
  undefined4 extraout_XMM0_Db_x00958;
  undefined4 extraout_XMM0_Db_x00959;
  undefined4 extraout_XMM0_Db_x00960;
  undefined4 extraout_XMM0_Db_x00961;
  undefined4 extraout_XMM0_Db_x00962;
  undefined4 extraout_XMM0_Db_x00963;
  undefined4 extraout_XMM0_Db_x00964;
  undefined4 extraout_XMM0_Db_x00965;
  undefined4 extraout_XMM0_Db_x00966;
  undefined4 extraout_XMM0_Db_x00967;
  undefined4 extraout_XMM0_Db_x00968;
  undefined4 extraout_XMM0_Db_x00969;
  undefined4 extraout_XMM0_Db_x00970;
  undefined4 extraout_XMM0_Db_x00971;
  undefined4 extraout_XMM0_Db_x00972;
  undefined4 extraout_XMM0_Db_x00973;
  undefined4 extraout_XMM0_Db_x00974;
  undefined4 extraout_XMM0_Db_x00975;
  undefined4 extraout_XMM0_Db_x00976;
  undefined4 extraout_XMM0_Db_x00977;
  undefined4 extraout_XMM0_Db_x00978;
  undefined4 extraout_XMM0_Db_x00979;
  undefined4 extraout_XMM0_Db_x00980;
  undefined4 extraout_XMM0_Db_x00981;
  undefined4 extraout_XMM0_Db_x00982;
  undefined4 extraout_XMM0_Db_x00983;
  undefined4 extraout_XMM0_Db_x00984;
  undefined4 extraout_XMM0_Db_x00985;
  undefined4 extraout_XMM0_Db_x00986;
  undefined4 extraout_XMM0_Db_x00987;
  undefined4 extraout_XMM0_Db_x00988;
  undefined4 extraout_XMM0_Db_x00989;
  undefined4 extraout_XMM0_Db_x00990;
  undefined4 extraout_XMM0_Db_x00991;
  undefined4 extraout_XMM0_Db_x00992;
  undefined4 extraout_XMM0_Db_x00993;
  undefined4 extraout_XMM0_Db_x00994;
  undefined4 extraout_XMM0_Db_x00995;
  undefined4 extraout_XMM0_Db_x00996;
  undefined4 extraout_XMM0_Db_x00997;
  undefined4 extraout_XMM0_Db_x00998;
  undefined4 extraout_XMM0_Db_x00999;
  undefined4 extraout_XMM0_Db_x01000;
  undefined4 extraout_XMM0_Db_x01001;
  undefined4 extraout_XMM0_Db_x01002;
  undefined4 extraout_XMM0_Db_x01003;
  undefined4 extraout_XMM0_Db_x01004;
  undefined4 extraout_XMM0_Db_x01005;
  undefined4 extraout_XMM0_Db_x01006;
  undefined4 extraout_XMM0_Db_x01007;
  undefined4 extraout_XMM0_Db_x01008;
  undefined4 extraout_XMM0_Db_x01009;
  undefined4 extraout_XMM0_Db_x01010;
  undefined4 extraout_XMM0_Db_x01011;
  undefined4 extraout_XMM0_Db_x01012;
  undefined4 extraout_XMM0_Db_x01013;
  undefined4 extraout_XMM0_Db_x01014;
  undefined4 extraout_XMM0_Db_x01015;
  undefined4 extraout_XMM0_Db_x01016;
  undefined4 extraout_XMM0_Db_x01017;
  undefined4 extraout_XMM0_Db_x01018;
  undefined4 extraout_XMM0_Db_x01019;
  undefined4 extraout_XMM0_Db_x01020;
  undefined4 extraout_XMM0_Db_x01021;
  undefined4 extraout_XMM0_Db_x01022;
  undefined4 extraout_XMM0_Db_x01023;
  undefined4 extraout_XMM0_Db_x01024;
  undefined4 extraout_XMM0_Db_x01025;
  undefined4 extraout_XMM0_Db_x01026;
  undefined4 extraout_XMM0_Db_x01027;
  undefined4 extraout_XMM0_Db_x01028;
  undefined4 extraout_XMM0_Db_x01029;
  undefined4 extraout_XMM0_Db_x01030;
  undefined4 extraout_XMM0_Db_x01031;
  undefined4 extraout_XMM0_Db_x01032;
  undefined4 extraout_XMM0_Db_x01033;
  undefined4 extraout_XMM0_Db_x01034;
  undefined4 extraout_XMM0_Db_x01035;
  undefined4 extraout_XMM0_Db_x01036;
  undefined4 extraout_XMM0_Db_x01037;
  undefined4 extraout_XMM0_Db_x01038;
  undefined4 extraout_XMM0_Db_x01039;
  undefined4 extraout_XMM0_Db_x01040;
  undefined4 extraout_XMM0_Db_x01041;
  undefined4 extraout_XMM0_Db_x01042;
  undefined4 extraout_XMM0_Db_x01043;
  undefined4 extraout_XMM0_Db_x01044;
  undefined4 extraout_XMM0_Db_x01045;
  undefined4 extraout_XMM0_Db_x01046;
  undefined4 extraout_XMM0_Db_x01047;
  undefined4 extraout_XMM0_Db_x01048;
  undefined4 extraout_XMM0_Db_x01049;
  undefined4 extraout_XMM0_Db_x01050;
  undefined4 extraout_XMM0_Db_x01051;
  undefined4 extraout_XMM0_Db_x01052;
  undefined4 extraout_XMM0_Db_x01053;
  undefined4 extraout_XMM0_Db_x01054;
  undefined4 extraout_XMM0_Db_x01055;
  undefined4 extraout_XMM0_Db_x01056;
  undefined4 extraout_XMM0_Db_x01057;
  undefined4 extraout_XMM0_Db_x01058;
  undefined4 extraout_XMM0_Db_x01059;
  undefined4 extraout_XMM0_Db_x01060;
  undefined4 extraout_XMM0_Db_x01061;
  undefined4 extraout_XMM0_Db_x01062;
  undefined4 extraout_XMM0_Db_x01063;
  undefined4 extraout_XMM0_Db_x01064;
  undefined4 extraout_XMM0_Db_x01065;
  undefined4 extraout_XMM0_Db_x01066;
  undefined4 extraout_XMM0_Db_x01067;
  undefined4 extraout_XMM0_Db_x01068;
  undefined4 extraout_XMM0_Db_x01069;
  undefined4 extraout_XMM0_Db_x01070;
  undefined4 extraout_XMM0_Db_x01071;
  undefined4 extraout_XMM0_Db_x01072;
  undefined4 extraout_XMM0_Db_x01073;
  undefined4 extraout_XMM0_Db_x01074;
  undefined4 extraout_XMM0_Db_x01075;
  undefined4 extraout_XMM0_Db_x01076;
  undefined4 extraout_XMM0_Db_x01077;
  undefined4 extraout_XMM0_Db_x01078;
  undefined4 extraout_XMM0_Db_x01079;
  undefined4 extraout_XMM0_Db_x01080;
  undefined4 extraout_XMM0_Db_x01081;
  undefined4 extraout_XMM0_Db_x01082;
  undefined4 extraout_XMM0_Db_x01083;
  undefined4 extraout_XMM0_Db_x01084;
  undefined4 extraout_XMM0_Db_x01085;
  undefined4 extraout_XMM0_Db_x01086;
  undefined4 extraout_XMM0_Db_x01087;
  undefined4 extraout_XMM0_Db_x01088;
  undefined4 extraout_XMM0_Db_x01089;
  undefined4 extraout_XMM0_Db_x01090;
  undefined4 extraout_XMM0_Db_x01091;
  undefined4 extraout_XMM0_Db_x01092;
  undefined4 extraout_XMM0_Db_x01093;
  undefined4 extraout_XMM0_Db_x01094;
  undefined4 extraout_XMM0_Db_x01095;
  undefined4 extraout_XMM0_Db_x01096;
  undefined4 extraout_XMM0_Db_x01097;
  undefined4 extraout_XMM0_Db_x01098;
  undefined4 extraout_XMM0_Db_x01099;
  undefined4 extraout_XMM0_Db_x01100;
  undefined4 extraout_XMM0_Db_x01101;
  undefined4 extraout_XMM0_Db_x01102;
  undefined4 extraout_XMM0_Db_x01103;
  undefined4 extraout_XMM0_Db_x01104;
  undefined4 extraout_XMM0_Db_x01105;
  undefined4 extraout_XMM0_Db_x01106;
  undefined4 extraout_XMM0_Db_x01107;
  undefined4 extraout_XMM0_Db_x01108;
  undefined4 extraout_XMM0_Db_x01109;
  undefined4 extraout_XMM0_Db_x01110;
  undefined4 extraout_XMM0_Db_x01111;
  undefined4 extraout_XMM0_Db_x01112;
  undefined4 extraout_XMM0_Db_x01113;
  undefined4 extraout_XMM0_Db_x01114;
  undefined4 extraout_XMM0_Db_x01115;
  undefined4 extraout_XMM0_Db_x01116;
  undefined4 extraout_XMM0_Db_x01117;
  undefined4 extraout_XMM0_Db_x01118;
  undefined4 extraout_XMM0_Db_x01119;
  undefined4 extraout_XMM0_Db_x01120;
  undefined4 extraout_XMM0_Db_x01121;
  undefined4 extraout_XMM0_Db_x01122;
  undefined4 extraout_XMM0_Db_x01123;
  undefined4 extraout_XMM0_Db_x01124;
  undefined4 extraout_XMM0_Db_x01125;
  undefined4 extraout_XMM0_Db_x01126;
  undefined4 extraout_XMM0_Db_x01127;
  undefined4 extraout_XMM0_Db_x01128;
  undefined4 extraout_XMM0_Db_x01129;
  undefined4 extraout_XMM0_Db_x01130;
  undefined4 extraout_XMM0_Db_x01131;
  undefined4 extraout_XMM0_Db_x01132;
  undefined4 extraout_XMM0_Db_x01133;
  undefined4 extraout_XMM0_Db_x01134;
  undefined4 extraout_XMM0_Db_x01135;
  undefined4 extraout_XMM0_Db_x01136;
  undefined4 extraout_XMM0_Db_x01137;
  undefined4 extraout_XMM0_Db_x01138;
  undefined4 extraout_XMM0_Db_x01139;
  undefined4 extraout_XMM0_Db_x01140;
  undefined4 extraout_XMM0_Db_x01141;
  undefined4 extraout_XMM0_Db_x01142;
  undefined4 extraout_XMM0_Db_x01143;
  undefined4 extraout_XMM0_Db_x01144;
  undefined4 extraout_XMM0_Db_x01145;
  undefined4 extraout_XMM0_Db_x01146;
  undefined4 extraout_XMM0_Db_x01147;
  undefined4 extraout_XMM0_Db_x01148;
  undefined4 extraout_XMM0_Db_x01149;
  undefined4 extraout_XMM0_Db_x01150;
  undefined4 extraout_XMM0_Db_x01151;
  undefined4 extraout_XMM0_Db_x01152;
  undefined4 extraout_XMM0_Db_x01153;
  undefined4 extraout_XMM0_Db_x01154;
  undefined4 extraout_XMM0_Db_x01155;
  undefined4 extraout_XMM0_Db_x01156;
  undefined4 extraout_XMM0_Db_x01157;
  undefined4 extraout_XMM0_Db_x01158;
  undefined4 extraout_XMM0_Db_x01159;
  undefined4 extraout_XMM0_Db_x01160;
  undefined4 extraout_XMM0_Db_x01161;
  undefined4 extraout_XMM0_Db_x01162;
  undefined4 extraout_XMM0_Db_x01163;
  undefined4 extraout_XMM0_Db_x01164;
  undefined4 extraout_XMM0_Db_x01165;
  undefined4 extraout_XMM0_Db_x01166;
  undefined4 extraout_XMM0_Db_x01167;
  undefined4 extraout_XMM0_Db_x01168;
  undefined4 extraout_XMM0_Db_x01169;
  undefined4 extraout_XMM0_Db_x01170;
  undefined4 extraout_XMM0_Db_x01171;
  undefined4 extraout_XMM0_Db_x01172;
  undefined4 extraout_XMM0_Db_x01173;
  undefined4 extraout_XMM0_Db_x01174;
  undefined4 extraout_XMM0_Db_x01175;
  undefined4 extraout_XMM0_Db_x01176;
  undefined4 extraout_XMM0_Db_x01177;
  undefined4 extraout_XMM0_Db_x01178;
  undefined4 extraout_XMM0_Db_x01179;
  undefined4 extraout_XMM0_Db_x01180;
  undefined4 extraout_XMM0_Db_x01181;
  undefined4 extraout_XMM0_Db_x01182;
  undefined4 extraout_XMM0_Db_x01183;
  undefined4 extraout_XMM0_Db_x01184;
  undefined4 extraout_XMM0_Db_x01185;
  undefined4 extraout_XMM0_Db_x01186;
  undefined4 extraout_XMM0_Db_x01187;
  undefined4 extraout_XMM0_Db_x01188;
  undefined4 extraout_XMM0_Db_x01189;
  undefined4 extraout_XMM0_Db_x01190;
  undefined4 extraout_XMM0_Db_x01191;
  undefined4 extraout_XMM0_Db_x01192;
  undefined4 extraout_XMM0_Db_x01193;
  undefined4 extraout_XMM0_Db_x01194;
  undefined4 extraout_XMM0_Db_x01195;
  undefined4 extraout_XMM0_Db_x01196;
  undefined4 extraout_XMM0_Db_x01197;
  undefined4 extraout_XMM0_Db_x01198;
  undefined4 extraout_XMM0_Db_x01199;
  undefined4 extraout_XMM0_Db_x01200;
  undefined4 extraout_XMM0_Db_x01201;
  undefined4 extraout_XMM0_Db_x01202;
  undefined4 extraout_XMM0_Db_x01203;
  undefined4 extraout_XMM0_Db_x01204;
  undefined4 extraout_XMM0_Db_x01205;
  undefined4 extraout_XMM0_Db_x01206;
  undefined4 extraout_XMM0_Db_x01207;
  undefined4 extraout_XMM0_Db_x01208;
  undefined4 extraout_XMM0_Db_x01209;
  undefined4 extraout_XMM0_Db_x01210;
  undefined4 extraout_XMM0_Db_x01211;
  undefined4 extraout_XMM0_Db_x01212;
  undefined4 extraout_XMM0_Db_x01213;
  undefined4 extraout_XMM0_Db_x01214;
  undefined4 extraout_XMM0_Db_x01215;
  undefined4 extraout_XMM0_Db_x01216;
  undefined4 extraout_XMM0_Db_x01217;
  undefined4 extraout_XMM0_Db_x01218;
  undefined4 extraout_XMM0_Db_x01219;
  undefined4 extraout_XMM0_Db_x01220;
  undefined4 extraout_XMM0_Db_x01221;
  undefined4 extraout_XMM0_Db_x01222;
  undefined4 extraout_XMM0_Db_x01223;
  undefined4 extraout_XMM0_Db_x01224;
  undefined4 extraout_XMM0_Db_x01225;
  undefined4 extraout_XMM0_Db_x01226;
  undefined4 extraout_XMM0_Db_x01227;
  undefined4 extraout_XMM0_Db_x01228;
  undefined4 extraout_XMM0_Db_x01229;
  undefined4 extraout_XMM0_Db_x01230;
  undefined4 extraout_XMM0_Db_x01231;
  undefined4 extraout_XMM0_Db_x01232;
  undefined4 extraout_XMM0_Db_x01233;
  undefined4 extraout_XMM0_Db_x01234;
  undefined4 extraout_XMM0_Db_x01235;
  undefined4 extraout_XMM0_Db_x01236;
  undefined4 extraout_XMM0_Db_x01237;
  undefined4 extraout_XMM0_Db_x01238;
  undefined4 extraout_XMM0_Db_x01239;
  undefined4 extraout_XMM0_Db_x01240;
  undefined4 extraout_XMM0_Db_x01241;
  undefined4 extraout_XMM0_Db_x01242;
  undefined4 extraout_XMM0_Db_x01243;
  undefined4 extraout_XMM0_Db_x01244;
  undefined4 extraout_XMM0_Db_x01245;
  undefined4 extraout_XMM0_Db_x01246;
  undefined4 extraout_XMM0_Db_x01247;
  undefined4 extraout_XMM0_Db_x01248;
  undefined4 extraout_XMM0_Db_x01249;
  undefined4 extraout_XMM0_Db_x01250;
  undefined4 extraout_XMM0_Db_x01251;
  undefined4 extraout_XMM0_Db_x01252;
  undefined4 extraout_XMM0_Db_x01253;
  undefined4 extraout_XMM0_Db_x01254;
  undefined4 extraout_XMM0_Db_x01255;
  undefined4 extraout_XMM0_Db_x01256;
  undefined4 extraout_XMM0_Db_x01257;
  undefined4 extraout_XMM0_Db_x01258;
  undefined4 extraout_XMM0_Db_x01259;
  undefined4 extraout_XMM0_Db_x01260;
  undefined4 extraout_XMM0_Db_x01261;
  undefined4 extraout_XMM0_Db_x01262;
  undefined4 extraout_XMM0_Db_x01263;
  undefined4 extraout_XMM0_Db_x01264;
  undefined4 extraout_XMM0_Db_x01265;
  undefined4 extraout_XMM0_Db_x01266;
  undefined4 extraout_XMM0_Db_x01267;
  undefined4 extraout_XMM0_Db_x01268;
  undefined4 extraout_XMM0_Db_x01269;
  undefined4 extraout_XMM0_Db_x01270;
  undefined4 extraout_XMM0_Db_x01271;
  undefined4 extraout_XMM0_Db_x01272;
  undefined4 extraout_XMM0_Db_x01273;
  undefined4 extraout_XMM0_Db_x01274;
  undefined4 extraout_XMM0_Db_x01275;
  undefined4 extraout_XMM0_Db_x01276;
  undefined4 extraout_XMM0_Db_x01277;
  undefined4 extraout_XMM0_Db_x01278;
  undefined4 extraout_XMM0_Db_x01279;
  undefined4 extraout_XMM0_Db_x01280;
  undefined4 extraout_XMM0_Db_x01281;
  undefined4 extraout_XMM0_Db_x01282;
  undefined4 extraout_XMM0_Db_x01283;
  undefined4 extraout_XMM0_Db_x01284;
  undefined4 extraout_XMM0_Db_x01285;
  undefined4 extraout_XMM0_Db_x01286;
  undefined4 extraout_XMM0_Db_x01287;
  undefined4 extraout_XMM0_Db_x01288;
  undefined4 extraout_XMM0_Db_x01289;
  undefined4 extraout_XMM0_Db_x01290;
  undefined4 extraout_XMM0_Db_x01291;
  undefined4 extraout_XMM0_Db_x01292;
  undefined4 extraout_XMM0_Db_x01293;
  undefined4 extraout_XMM0_Db_x01294;
  undefined4 extraout_XMM0_Db_x01295;
  undefined4 extraout_XMM0_Db_x01296;
  undefined4 extraout_XMM0_Db_x01297;
  undefined4 extraout_XMM0_Db_x01298;
  undefined4 extraout_XMM0_Db_x01299;
  undefined4 extraout_XMM0_Db_x01300;
  undefined4 extraout_XMM0_Db_x01301;
  undefined4 extraout_XMM0_Db_x01302;
  undefined4 extraout_XMM0_Db_x01303;
  undefined4 extraout_XMM0_Db_x01304;
  undefined4 extraout_XMM0_Db_x01305;
  undefined4 extraout_XMM0_Db_x01306;
  undefined4 extraout_XMM0_Db_x01307;
  undefined4 extraout_XMM0_Db_x01308;
  undefined4 extraout_XMM0_Db_x01309;
  undefined4 extraout_XMM0_Db_x01310;
  undefined4 extraout_XMM0_Db_x01311;
  undefined4 extraout_XMM0_Db_x01312;
  undefined4 extraout_XMM0_Db_x01313;
  undefined4 extraout_XMM0_Db_x01314;
  undefined4 extraout_XMM0_Db_x01315;
  undefined4 extraout_XMM0_Db_x01316;
  undefined4 extraout_XMM0_Db_x01317;
  undefined4 extraout_XMM0_Db_x01318;
  undefined4 extraout_XMM0_Db_x01319;
  undefined4 extraout_XMM0_Db_x01320;
  undefined4 extraout_XMM0_Db_x01321;
  undefined4 extraout_XMM0_Db_x01322;
  undefined4 extraout_XMM0_Db_x01323;
  undefined4 extraout_XMM0_Db_x01324;
  undefined4 extraout_XMM0_Db_x01325;
  undefined4 extraout_XMM0_Db_x01326;
  undefined4 extraout_XMM0_Db_x01327;
  undefined4 extraout_XMM0_Db_x01328;
  undefined4 extraout_XMM0_Db_x01329;
  undefined4 extraout_XMM0_Db_x01330;
  undefined4 extraout_XMM0_Db_x01331;
  undefined4 extraout_XMM0_Db_x01332;
  undefined4 extraout_XMM0_Db_x01333;
  undefined4 extraout_XMM0_Db_x01334;
  undefined4 extraout_XMM0_Db_x01335;
  undefined4 extraout_XMM0_Db_x01336;
  undefined4 extraout_XMM0_Db_x01337;
  undefined4 extraout_XMM0_Db_x01338;
  undefined4 extraout_XMM0_Db_x01339;
  undefined4 extraout_XMM0_Db_x01340;
  undefined4 extraout_XMM0_Db_x01341;
  undefined4 extraout_XMM0_Db_x01342;
  undefined4 extraout_XMM0_Db_x01343;
  undefined4 extraout_XMM0_Db_x01344;
  undefined4 extraout_XMM0_Db_x01345;
  undefined4 extraout_XMM0_Db_x01346;
  undefined4 extraout_XMM0_Db_x01347;
  undefined4 extraout_XMM0_Db_x01348;
  undefined4 extraout_XMM0_Db_x01349;
  undefined4 extraout_XMM0_Db_x01350;
  undefined4 extraout_XMM0_Db_x01351;
  undefined4 extraout_XMM0_Db_x01352;
  undefined4 extraout_XMM0_Db_x01353;
  undefined4 extraout_XMM0_Db_x01354;
  undefined4 extraout_XMM0_Db_x01355;
  undefined4 extraout_XMM0_Db_x01356;
  undefined4 extraout_XMM0_Db_x01357;
  undefined4 extraout_XMM0_Db_x01358;
  undefined4 extraout_XMM0_Db_x01359;
  undefined4 extraout_XMM0_Db_x01360;
  undefined4 extraout_XMM0_Db_x01361;
  undefined4 extraout_XMM0_Db_x01362;
  undefined4 extraout_XMM0_Db_x01363;
  undefined4 extraout_XMM0_Db_x01364;
  undefined4 extraout_XMM0_Db_x01365;
  undefined4 extraout_XMM0_Db_x01366;
  undefined4 extraout_XMM0_Db_x01367;
  undefined4 extraout_XMM0_Db_x01368;
  undefined4 extraout_XMM0_Db_x01369;
  undefined4 extraout_XMM0_Db_x01370;
  undefined4 extraout_XMM0_Db_x01371;
  undefined4 extraout_XMM0_Db_x01372;
  undefined4 extraout_XMM0_Db_x01373;
  undefined4 extraout_XMM0_Db_x01374;
  undefined4 extraout_XMM0_Db_x01375;
  undefined4 extraout_XMM0_Db_x01376;
  undefined4 extraout_XMM0_Db_x01377;
  undefined4 extraout_XMM0_Db_x01378;
  undefined4 extraout_XMM0_Db_x01379;
  undefined4 extraout_XMM0_Db_x01380;
  undefined4 extraout_XMM0_Db_x01381;
  undefined4 extraout_XMM0_Db_x01382;
  undefined4 extraout_XMM0_Db_x01383;
  undefined4 extraout_XMM0_Db_x01384;
  undefined4 extraout_XMM0_Db_x01385;
  undefined4 extraout_XMM0_Db_x01386;
  undefined4 extraout_XMM0_Db_x01387;
  undefined4 extraout_XMM0_Db_x01388;
  undefined4 extraout_XMM0_Db_x01389;
  undefined4 extraout_XMM0_Db_x01390;
  undefined4 extraout_XMM0_Db_x01391;
  undefined4 extraout_XMM0_Db_x01392;
  undefined4 extraout_XMM0_Db_x01393;
  undefined4 extraout_XMM0_Db_x01394;
  undefined4 extraout_XMM0_Db_x01395;
  undefined4 extraout_XMM0_Db_x01396;
  undefined4 extraout_XMM0_Db_x01397;
  undefined4 extraout_XMM0_Db_x01398;
  undefined4 extraout_XMM0_Db_x01399;
  undefined4 extraout_XMM0_Db_x01400;
  undefined4 extraout_XMM0_Db_x01401;
  undefined4 extraout_XMM0_Db_x01402;
  undefined4 extraout_XMM0_Db_x01403;
  undefined4 extraout_XMM0_Db_x01404;
  undefined4 extraout_XMM0_Db_x01405;
  undefined4 extraout_XMM0_Db_x01406;
  undefined4 extraout_XMM0_Db_x01407;
  undefined4 extraout_XMM0_Db_x01408;
  undefined4 extraout_XMM0_Db_x01409;
  undefined4 extraout_XMM0_Db_x01410;
  undefined4 extraout_XMM0_Db_x01411;
  undefined4 extraout_XMM0_Db_x01412;
  undefined4 extraout_XMM0_Db_x01413;
  undefined4 extraout_XMM0_Db_x01414;
  undefined4 extraout_XMM0_Db_x01415;
  undefined4 extraout_XMM0_Db_x01416;
  undefined4 extraout_XMM0_Db_x01417;
  undefined4 extraout_XMM0_Db_x01418;
  undefined4 extraout_XMM0_Db_x01419;
  undefined4 extraout_XMM0_Db_x01420;
  undefined4 extraout_XMM0_Db_x01421;
  undefined4 extraout_XMM0_Db_x01422;
  undefined4 extraout_XMM0_Db_x01423;
  undefined4 extraout_XMM0_Db_x01424;
  undefined4 extraout_XMM0_Db_x01425;
  undefined4 extraout_XMM0_Db_x01426;
  undefined4 extraout_XMM0_Db_x01427;
  undefined4 extraout_XMM0_Db_x01428;
  undefined4 extraout_XMM0_Db_x01429;
  undefined4 extraout_XMM0_Db_x01430;
  undefined4 extraout_XMM0_Db_x01431;
  undefined4 extraout_XMM0_Db_x01432;
  undefined4 extraout_XMM0_Db_x01433;
  undefined4 extraout_XMM0_Db_x01434;
  undefined4 extraout_XMM0_Db_x01435;
  undefined4 extraout_XMM0_Db_x01436;
  undefined4 extraout_XMM0_Db_x01437;
  undefined4 extraout_XMM0_Db_x01438;
  undefined4 extraout_XMM0_Db_x01439;
  undefined4 extraout_XMM0_Db_x01440;
  undefined4 extraout_XMM0_Db_x01441;
  undefined4 extraout_XMM0_Db_x01442;
  undefined4 extraout_XMM0_Db_x01443;
  undefined4 extraout_XMM0_Db_x01444;
  undefined4 extraout_XMM0_Db_x01445;
  undefined4 extraout_XMM0_Db_x01446;
  undefined4 extraout_XMM0_Db_x01447;
  undefined4 extraout_XMM0_Db_x01448;
  undefined4 extraout_XMM0_Db_x01449;
  undefined4 extraout_XMM0_Db_x01450;
  undefined4 extraout_XMM0_Db_x01451;
  undefined4 extraout_XMM0_Db_x01452;
  undefined4 extraout_XMM0_Db_x01453;
  undefined4 extraout_XMM0_Db_x01454;
  undefined4 extraout_XMM0_Db_x01455;
  undefined4 extraout_XMM0_Db_x01456;
  undefined4 extraout_XMM0_Db_x01457;
  undefined4 extraout_XMM0_Db_x01458;
  undefined4 extraout_XMM0_Db_x01459;
  undefined4 extraout_XMM0_Db_x01460;
  undefined4 extraout_XMM0_Db_x01461;
  undefined4 extraout_XMM0_Db_x01462;
  undefined4 extraout_XMM0_Db_x01463;
  undefined4 extraout_XMM0_Db_x01464;
  undefined4 extraout_XMM0_Db_x01465;
  undefined4 extraout_XMM0_Db_x01466;
  undefined4 extraout_XMM0_Db_x01467;
  undefined4 extraout_XMM0_Db_x01468;
  undefined4 extraout_XMM0_Db_x01469;
  undefined4 extraout_XMM0_Db_x01470;
  undefined4 extraout_XMM0_Db_x01471;
  undefined4 extraout_XMM0_Db_x01472;
  undefined4 extraout_XMM0_Db_x01473;
  undefined4 extraout_XMM0_Db_x01474;
  undefined4 extraout_XMM0_Db_x01475;
  undefined4 extraout_XMM0_Db_x01476;
  undefined4 extraout_XMM0_Db_x01477;
  undefined4 extraout_XMM0_Db_x01478;
  undefined4 extraout_XMM0_Db_x01479;
  undefined4 extraout_XMM0_Db_x01480;
  undefined4 extraout_XMM0_Db_x01481;
  undefined4 extraout_XMM0_Db_x01482;
  undefined4 extraout_XMM0_Db_x01483;
  undefined4 extraout_XMM0_Db_x01484;
  undefined4 extraout_XMM0_Db_x01485;
  undefined4 extraout_XMM0_Db_x01486;
  undefined4 extraout_XMM0_Db_x01487;
  undefined4 extraout_XMM0_Db_x01488;
  undefined4 extraout_XMM0_Db_x01489;
  undefined4 extraout_XMM0_Db_x01490;
  undefined4 extraout_XMM0_Db_x01491;
  undefined4 extraout_XMM0_Db_x01492;
  undefined4 extraout_XMM0_Db_x01493;
  undefined4 extraout_XMM0_Db_x01494;
  undefined4 extraout_XMM0_Db_x01495;
  undefined4 extraout_XMM0_Db_x01496;
  undefined4 extraout_XMM0_Db_x01497;
  undefined4 extraout_XMM0_Db_x01498;
  undefined4 extraout_XMM0_Db_x01499;
  undefined4 extraout_XMM0_Db_x01500;
  undefined4 extraout_XMM0_Db_x01501;
  undefined4 extraout_XMM0_Db_x01502;
  undefined4 extraout_XMM0_Db_x01503;
  undefined4 extraout_XMM0_Db_x01504;
  undefined4 extraout_XMM0_Db_x01505;
  undefined4 extraout_XMM0_Db_x01506;
  undefined4 extraout_XMM0_Db_x01507;
  undefined4 extraout_XMM0_Db_x01508;
  undefined4 extraout_XMM0_Db_x01509;
  undefined4 extraout_XMM0_Db_x01510;
  undefined4 extraout_XMM0_Db_x01511;
  undefined4 extraout_XMM0_Db_x01512;
  undefined4 extraout_XMM0_Db_x01513;
  undefined4 extraout_XMM0_Db_x01514;
  undefined4 extraout_XMM0_Db_x01515;
  undefined4 extraout_XMM0_Db_x01516;
  undefined4 extraout_XMM0_Db_x01517;
  undefined4 extraout_XMM0_Db_x01518;
  undefined4 extraout_XMM0_Db_x01519;
  undefined4 extraout_XMM0_Db_x01520;
  undefined4 extraout_XMM0_Db_x01521;
  undefined4 extraout_XMM0_Db_x01522;
  undefined4 extraout_XMM0_Db_x01523;
  undefined4 extraout_XMM0_Db_x01524;
  undefined4 extraout_XMM0_Db_x01525;
  undefined4 extraout_XMM0_Db_x01526;
  undefined4 extraout_XMM0_Db_x01527;
  undefined4 extraout_XMM0_Db_x01528;
  undefined4 extraout_XMM0_Db_x01529;
  undefined4 extraout_XMM0_Db_x01530;
  undefined4 extraout_XMM0_Db_x01531;
  undefined4 extraout_XMM0_Db_x01532;
  undefined4 extraout_XMM0_Db_x01533;
  undefined4 extraout_XMM0_Db_x01534;
  undefined4 extraout_XMM0_Db_x01535;
  undefined4 extraout_XMM0_Db_x01536;
  undefined4 extraout_XMM0_Db_x01537;
  undefined4 extraout_XMM0_Db_x01538;
  undefined4 extraout_XMM0_Db_x01539;
  undefined4 extraout_XMM0_Db_x01540;
  undefined4 extraout_XMM0_Db_x01541;
  undefined4 extraout_XMM0_Db_x01542;
  undefined4 extraout_XMM0_Db_x01543;
  undefined4 extraout_XMM0_Db_x01544;
  undefined4 extraout_XMM0_Db_x01545;
  undefined4 extraout_XMM0_Db_x01546;
  undefined4 extraout_XMM0_Db_x01547;
  undefined4 extraout_XMM0_Db_x01548;
  undefined4 extraout_XMM0_Db_x01549;
  undefined4 extraout_XMM0_Db_x01550;
  undefined4 extraout_XMM0_Db_x01551;
  undefined4 extraout_XMM0_Db_x01552;
  undefined4 extraout_XMM0_Db_x01553;
  undefined4 extraout_XMM0_Db_x01554;
  undefined4 extraout_XMM0_Db_x01555;
  undefined4 extraout_XMM0_Db_x01556;
  undefined4 extraout_XMM0_Db_x01557;
  undefined4 extraout_XMM0_Db_x01558;
  undefined4 extraout_XMM0_Db_x01559;
  undefined4 extraout_XMM0_Db_x01560;
  undefined4 extraout_XMM0_Db_x01561;
  undefined4 extraout_XMM0_Db_x01562;
  undefined4 extraout_XMM0_Db_x01563;
  undefined4 extraout_XMM0_Db_x01564;
  undefined4 extraout_XMM0_Db_x01565;
  undefined4 extraout_XMM0_Db_x01566;
  undefined4 extraout_XMM0_Db_x01567;
  undefined4 extraout_XMM0_Db_x01568;
  undefined4 extraout_XMM0_Db_x01569;
  undefined4 extraout_XMM0_Db_x01570;
  undefined4 extraout_XMM0_Db_x01571;
  undefined4 extraout_XMM0_Db_x01572;
  undefined4 extraout_XMM0_Db_x01573;
  undefined4 extraout_XMM0_Db_x01574;
  undefined4 extraout_XMM0_Db_x01575;
  undefined4 extraout_XMM0_Db_x01576;
  undefined4 extraout_XMM0_Db_x01577;
  undefined4 extraout_XMM0_Db_x01578;
  undefined4 extraout_XMM0_Db_x01579;
  undefined4 extraout_XMM0_Db_x01580;
  undefined4 extraout_XMM0_Db_x01581;
  undefined4 extraout_XMM0_Db_x01582;
  undefined4 extraout_XMM0_Db_x01583;
  undefined4 extraout_XMM0_Db_x01584;
  undefined4 extraout_XMM0_Db_x01585;
  undefined4 extraout_XMM0_Db_x01586;
  undefined4 extraout_XMM0_Db_x01587;
  undefined4 extraout_XMM0_Db_x01588;
  undefined4 extraout_XMM0_Db_x01589;
  undefined4 extraout_XMM0_Db_x01590;
  undefined4 extraout_XMM0_Db_x01591;
  undefined4 extraout_XMM0_Db_x01592;
  undefined4 extraout_XMM0_Db_x01593;
  undefined4 extraout_XMM0_Db_x01594;
  undefined4 extraout_XMM0_Db_x01595;
  undefined4 extraout_XMM0_Db_x01596;
  undefined4 extraout_XMM0_Db_x01597;
  undefined4 extraout_XMM0_Db_x01598;
  undefined4 extraout_XMM0_Db_x01599;
  undefined4 extraout_XMM0_Db_x01600;
  undefined4 extraout_XMM0_Db_x01601;
  undefined4 extraout_XMM0_Db_x01602;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dc_17;
  undefined4 extraout_XMM0_Dc_18;
  undefined4 extraout_XMM0_Dc_19;
  undefined4 extraout_XMM0_Dc_20;
  undefined4 extraout_XMM0_Dc_21;
  undefined4 extraout_XMM0_Dc_22;
  undefined4 extraout_XMM0_Dc_23;
  undefined4 extraout_XMM0_Dc_24;
  undefined4 extraout_XMM0_Dc_25;
  undefined4 extraout_XMM0_Dc_26;
  undefined4 extraout_XMM0_Dc_27;
  undefined4 extraout_XMM0_Dc_28;
  undefined4 extraout_XMM0_Dc_29;
  undefined4 extraout_XMM0_Dc_30;
  undefined4 extraout_XMM0_Dc_31;
  undefined4 extraout_XMM0_Dc_32;
  undefined4 extraout_XMM0_Dc_33;
  undefined4 extraout_XMM0_Dc_34;
  undefined4 extraout_XMM0_Dc_35;
  undefined4 extraout_XMM0_Dc_36;
  undefined4 extraout_XMM0_Dc_37;
  undefined4 extraout_XMM0_Dc_38;
  undefined4 extraout_XMM0_Dc_39;
  undefined4 extraout_XMM0_Dc_40;
  undefined4 extraout_XMM0_Dc_41;
  undefined4 extraout_XMM0_Dc_42;
  undefined4 extraout_XMM0_Dc_43;
  undefined4 extraout_XMM0_Dc_44;
  undefined4 extraout_XMM0_Dc_45;
  undefined4 extraout_XMM0_Dc_46;
  undefined4 extraout_XMM0_Dc_47;
  undefined4 extraout_XMM0_Dc_48;
  undefined4 extraout_XMM0_Dc_49;
  undefined4 extraout_XMM0_Dc_50;
  undefined4 extraout_XMM0_Dc_51;
  undefined4 extraout_XMM0_Dc_52;
  undefined4 extraout_XMM0_Dc_53;
  undefined4 extraout_XMM0_Dc_54;
  undefined4 extraout_XMM0_Dc_55;
  undefined4 extraout_XMM0_Dc_56;
  undefined4 extraout_XMM0_Dc_57;
  undefined4 extraout_XMM0_Dc_58;
  undefined4 extraout_XMM0_Dc_59;
  undefined4 extraout_XMM0_Dc_60;
  undefined4 extraout_XMM0_Dc_61;
  undefined4 extraout_XMM0_Dc_62;
  undefined4 extraout_XMM0_Dc_63;
  undefined4 extraout_XMM0_Dc_64;
  undefined4 extraout_XMM0_Dc_65;
  undefined4 extraout_XMM0_Dc_66;
  undefined4 extraout_XMM0_Dc_67;
  undefined4 extraout_XMM0_Dc_68;
  undefined4 extraout_XMM0_Dc_69;
  undefined4 extraout_XMM0_Dc_70;
  undefined4 extraout_XMM0_Dc_71;
  undefined4 extraout_XMM0_Dc_72;
  undefined4 extraout_XMM0_Dc_73;
  undefined4 extraout_XMM0_Dc_74;
  undefined4 extraout_XMM0_Dc_75;
  undefined4 extraout_XMM0_Dc_76;
  undefined4 extraout_XMM0_Dc_77;
  undefined4 extraout_XMM0_Dc_78;
  undefined4 extraout_XMM0_Dc_79;
  undefined4 extraout_XMM0_Dc_80;
  undefined4 extraout_XMM0_Dc_81;
  undefined4 extraout_XMM0_Dc_82;
  undefined4 extraout_XMM0_Dc_83;
  undefined4 extraout_XMM0_Dc_84;
  undefined4 extraout_XMM0_Dc_85;
  undefined4 extraout_XMM0_Dc_86;
  undefined4 extraout_XMM0_Dc_87;
  undefined4 extraout_XMM0_Dc_88;
  undefined4 extraout_XMM0_Dc_89;
  undefined4 extraout_XMM0_Dc_90;
  undefined4 extraout_XMM0_Dc_91;
  undefined4 extraout_XMM0_Dc_92;
  undefined4 extraout_XMM0_Dc_93;
  undefined4 extraout_XMM0_Dc_94;
  undefined4 extraout_XMM0_Dc_95;
  undefined4 extraout_XMM0_Dc_96;
  undefined4 extraout_XMM0_Dc_97;
  undefined4 extraout_XMM0_Dc_98;
  undefined4 extraout_XMM0_Dc_99;
  undefined4 extraout_XMM0_Dc_x00100;
  undefined4 extraout_XMM0_Dc_x00101;
  undefined4 extraout_XMM0_Dc_x00102;
  undefined4 extraout_XMM0_Dc_x00103;
  undefined4 extraout_XMM0_Dc_x00104;
  undefined4 extraout_XMM0_Dc_x00105;
  undefined4 extraout_XMM0_Dc_x00106;
  undefined4 extraout_XMM0_Dc_x00107;
  undefined4 extraout_XMM0_Dc_x00108;
  undefined4 extraout_XMM0_Dc_x00109;
  undefined4 extraout_XMM0_Dc_x00110;
  undefined4 extraout_XMM0_Dc_x00111;
  undefined4 extraout_XMM0_Dc_x00112;
  undefined4 extraout_XMM0_Dc_x00113;
  undefined4 extraout_XMM0_Dc_x00114;
  undefined4 extraout_XMM0_Dc_x00115;
  undefined4 extraout_XMM0_Dc_x00116;
  undefined4 extraout_XMM0_Dc_x00117;
  undefined4 extraout_XMM0_Dc_x00118;
  undefined4 extraout_XMM0_Dc_x00119;
  undefined4 extraout_XMM0_Dc_x00120;
  undefined4 extraout_XMM0_Dc_x00121;
  undefined4 extraout_XMM0_Dc_x00122;
  undefined4 extraout_XMM0_Dc_x00123;
  undefined4 extraout_XMM0_Dc_x00124;
  undefined4 extraout_XMM0_Dc_x00125;
  undefined4 extraout_XMM0_Dc_x00126;
  undefined4 extraout_XMM0_Dc_x00127;
  undefined4 extraout_XMM0_Dc_x00128;
  undefined4 extraout_XMM0_Dc_x00129;
  undefined4 extraout_XMM0_Dc_x00130;
  undefined4 extraout_XMM0_Dc_x00131;
  undefined4 extraout_XMM0_Dc_x00132;
  undefined4 extraout_XMM0_Dc_x00133;
  undefined4 extraout_XMM0_Dc_x00134;
  undefined4 extraout_XMM0_Dc_x00135;
  undefined4 extraout_XMM0_Dc_x00136;
  undefined4 extraout_XMM0_Dc_x00137;
  undefined4 extraout_XMM0_Dc_x00138;
  undefined4 extraout_XMM0_Dc_x00139;
  undefined4 extraout_XMM0_Dc_x00140;
  undefined4 extraout_XMM0_Dc_x00141;
  undefined4 extraout_XMM0_Dc_x00142;
  undefined4 extraout_XMM0_Dc_x00143;
  undefined4 extraout_XMM0_Dc_x00144;
  undefined4 extraout_XMM0_Dc_x00145;
  undefined4 extraout_XMM0_Dc_x00146;
  undefined4 extraout_XMM0_Dc_x00147;
  undefined4 extraout_XMM0_Dc_x00148;
  undefined4 extraout_XMM0_Dc_x00149;
  undefined4 extraout_XMM0_Dc_x00150;
  undefined4 extraout_XMM0_Dc_x00151;
  undefined4 extraout_XMM0_Dc_x00152;
  undefined4 extraout_XMM0_Dc_x00153;
  undefined4 extraout_XMM0_Dc_x00154;
  undefined4 extraout_XMM0_Dc_x00155;
  undefined4 extraout_XMM0_Dc_x00156;
  undefined4 extraout_XMM0_Dc_x00157;
  undefined4 extraout_XMM0_Dc_x00158;
  undefined4 extraout_XMM0_Dc_x00159;
  undefined4 extraout_XMM0_Dc_x00160;
  undefined4 extraout_XMM0_Dc_x00161;
  undefined4 extraout_XMM0_Dc_x00162;
  undefined4 extraout_XMM0_Dc_x00163;
  undefined4 extraout_XMM0_Dc_x00164;
  undefined4 extraout_XMM0_Dc_x00165;
  undefined4 extraout_XMM0_Dc_x00166;
  undefined4 extraout_XMM0_Dc_x00167;
  undefined4 extraout_XMM0_Dc_x00168;
  undefined4 extraout_XMM0_Dc_x00169;
  undefined4 extraout_XMM0_Dc_x00170;
  undefined4 extraout_XMM0_Dc_x00171;
  undefined4 extraout_XMM0_Dc_x00172;
  undefined4 extraout_XMM0_Dc_x00173;
  undefined4 extraout_XMM0_Dc_x00174;
  undefined4 extraout_XMM0_Dc_x00175;
  undefined4 extraout_XMM0_Dc_x00176;
  undefined4 extraout_XMM0_Dc_x00177;
  undefined4 extraout_XMM0_Dc_x00178;
  undefined4 extraout_XMM0_Dc_x00179;
  undefined4 extraout_XMM0_Dc_x00180;
  undefined4 extraout_XMM0_Dc_x00181;
  undefined4 extraout_XMM0_Dc_x00182;
  undefined4 extraout_XMM0_Dc_x00183;
  undefined4 extraout_XMM0_Dc_x00184;
  undefined4 extraout_XMM0_Dc_x00185;
  undefined4 extraout_XMM0_Dc_x00186;
  undefined4 extraout_XMM0_Dc_x00187;
  undefined4 extraout_XMM0_Dc_x00188;
  undefined4 extraout_XMM0_Dc_x00189;
  undefined4 extraout_XMM0_Dc_x00190;
  undefined4 extraout_XMM0_Dc_x00191;
  undefined4 extraout_XMM0_Dc_x00192;
  undefined4 extraout_XMM0_Dc_x00193;
  undefined4 extraout_XMM0_Dc_x00194;
  undefined4 extraout_XMM0_Dc_x00195;
  undefined4 extraout_XMM0_Dc_x00196;
  undefined4 extraout_XMM0_Dc_x00197;
  undefined4 extraout_XMM0_Dc_x00198;
  undefined4 extraout_XMM0_Dc_x00199;
  undefined4 extraout_XMM0_Dc_x00200;
  undefined4 extraout_XMM0_Dc_x00201;
  undefined4 extraout_XMM0_Dc_x00202;
  undefined4 extraout_XMM0_Dc_x00203;
  undefined4 extraout_XMM0_Dc_x00204;
  undefined4 extraout_XMM0_Dc_x00205;
  undefined4 extraout_XMM0_Dc_x00206;
  undefined4 extraout_XMM0_Dc_x00207;
  undefined4 extraout_XMM0_Dc_x00208;
  undefined4 extraout_XMM0_Dc_x00209;
  undefined4 extraout_XMM0_Dc_x00210;
  undefined4 extraout_XMM0_Dc_x00211;
  undefined4 extraout_XMM0_Dc_x00212;
  undefined4 extraout_XMM0_Dc_x00213;
  undefined4 extraout_XMM0_Dc_x00214;
  undefined4 extraout_XMM0_Dc_x00215;
  undefined4 extraout_XMM0_Dc_x00216;
  undefined4 extraout_XMM0_Dc_x00217;
  undefined4 extraout_XMM0_Dc_x00218;
  undefined4 extraout_XMM0_Dc_x00219;
  undefined4 extraout_XMM0_Dc_x00220;
  undefined4 extraout_XMM0_Dc_x00221;
  undefined4 extraout_XMM0_Dc_x00222;
  undefined4 extraout_XMM0_Dc_x00223;
  undefined4 extraout_XMM0_Dc_x00224;
  undefined4 extraout_XMM0_Dc_x00225;
  undefined4 extraout_XMM0_Dc_x00226;
  undefined4 extraout_XMM0_Dc_x00227;
  undefined4 extraout_XMM0_Dc_x00228;
  undefined4 extraout_XMM0_Dc_x00229;
  undefined4 extraout_XMM0_Dc_x00230;
  undefined4 extraout_XMM0_Dc_x00231;
  undefined4 extraout_XMM0_Dc_x00232;
  undefined4 extraout_XMM0_Dc_x00233;
  undefined4 extraout_XMM0_Dc_x00234;
  undefined4 extraout_XMM0_Dc_x00235;
  undefined4 extraout_XMM0_Dc_x00236;
  undefined4 extraout_XMM0_Dc_x00237;
  undefined4 extraout_XMM0_Dc_x00238;
  undefined4 extraout_XMM0_Dc_x00239;
  undefined4 extraout_XMM0_Dc_x00240;
  undefined4 extraout_XMM0_Dc_x00241;
  undefined4 extraout_XMM0_Dc_x00242;
  undefined4 extraout_XMM0_Dc_x00243;
  undefined4 extraout_XMM0_Dc_x00244;
  undefined4 extraout_XMM0_Dc_x00245;
  undefined4 extraout_XMM0_Dc_x00246;
  undefined4 extraout_XMM0_Dc_x00247;
  undefined4 extraout_XMM0_Dc_x00248;
  undefined4 extraout_XMM0_Dc_x00249;
  undefined4 extraout_XMM0_Dc_x00250;
  undefined4 extraout_XMM0_Dc_x00251;
  undefined4 extraout_XMM0_Dc_x00252;
  undefined4 extraout_XMM0_Dc_x00253;
  undefined4 extraout_XMM0_Dc_x00254;
  undefined4 extraout_XMM0_Dc_x00255;
  undefined4 extraout_XMM0_Dc_x00256;
  undefined4 extraout_XMM0_Dc_x00257;
  undefined4 extraout_XMM0_Dc_x00258;
  undefined4 extraout_XMM0_Dc_x00259;
  undefined4 extraout_XMM0_Dc_x00260;
  undefined4 extraout_XMM0_Dc_x00261;
  undefined4 extraout_XMM0_Dc_x00262;
  undefined4 extraout_XMM0_Dc_x00263;
  undefined4 extraout_XMM0_Dc_x00264;
  undefined4 extraout_XMM0_Dc_x00265;
  undefined4 extraout_XMM0_Dc_x00266;
  undefined4 extraout_XMM0_Dc_x00267;
  undefined4 extraout_XMM0_Dc_x00268;
  undefined4 extraout_XMM0_Dc_x00269;
  undefined4 extraout_XMM0_Dc_x00270;
  undefined4 extraout_XMM0_Dc_x00271;
  undefined4 extraout_XMM0_Dc_x00272;
  undefined4 extraout_XMM0_Dc_x00273;
  undefined4 extraout_XMM0_Dc_x00274;
  undefined4 extraout_XMM0_Dc_x00275;
  undefined4 extraout_XMM0_Dc_x00276;
  undefined4 extraout_XMM0_Dc_x00277;
  undefined4 extraout_XMM0_Dc_x00278;
  undefined4 extraout_XMM0_Dc_x00279;
  undefined4 extraout_XMM0_Dc_x00280;
  undefined4 extraout_XMM0_Dc_x00281;
  undefined4 extraout_XMM0_Dc_x00282;
  undefined4 extraout_XMM0_Dc_x00283;
  undefined4 extraout_XMM0_Dc_x00284;
  undefined4 extraout_XMM0_Dc_x00285;
  undefined4 extraout_XMM0_Dc_x00286;
  undefined4 extraout_XMM0_Dc_x00287;
  undefined4 extraout_XMM0_Dc_x00288;
  undefined4 extraout_XMM0_Dc_x00289;
  undefined4 extraout_XMM0_Dc_x00290;
  undefined4 extraout_XMM0_Dc_x00291;
  undefined4 extraout_XMM0_Dc_x00292;
  undefined4 extraout_XMM0_Dc_x00293;
  undefined4 extraout_XMM0_Dc_x00294;
  undefined4 extraout_XMM0_Dc_x00295;
  undefined4 extraout_XMM0_Dc_x00296;
  undefined4 extraout_XMM0_Dc_x00297;
  undefined4 extraout_XMM0_Dc_x00298;
  undefined4 extraout_XMM0_Dc_x00299;
  undefined4 extraout_XMM0_Dc_x00300;
  undefined4 extraout_XMM0_Dc_x00301;
  undefined4 extraout_XMM0_Dc_x00302;
  undefined4 extraout_XMM0_Dc_x00303;
  undefined4 extraout_XMM0_Dc_x00304;
  undefined4 extraout_XMM0_Dc_x00305;
  undefined4 extraout_XMM0_Dc_x00306;
  undefined4 extraout_XMM0_Dc_x00307;
  undefined4 extraout_XMM0_Dc_x00308;
  undefined4 extraout_XMM0_Dc_x00309;
  undefined4 extraout_XMM0_Dc_x00310;
  undefined4 extraout_XMM0_Dc_x00311;
  undefined4 extraout_XMM0_Dc_x00312;
  undefined4 extraout_XMM0_Dc_x00313;
  undefined4 extraout_XMM0_Dc_x00314;
  undefined4 extraout_XMM0_Dc_x00315;
  undefined4 extraout_XMM0_Dc_x00316;
  undefined4 extraout_XMM0_Dc_x00317;
  undefined4 extraout_XMM0_Dc_x00318;
  undefined4 extraout_XMM0_Dc_x00319;
  undefined4 extraout_XMM0_Dc_x00320;
  undefined4 extraout_XMM0_Dc_x00321;
  undefined4 extraout_XMM0_Dc_x00322;
  undefined4 extraout_XMM0_Dc_x00323;
  undefined4 extraout_XMM0_Dc_x00324;
  undefined4 extraout_XMM0_Dc_x00325;
  undefined4 extraout_XMM0_Dc_x00326;
  undefined4 extraout_XMM0_Dc_x00327;
  undefined4 extraout_XMM0_Dc_x00328;
  undefined4 extraout_XMM0_Dc_x00329;
  undefined4 extraout_XMM0_Dc_x00330;
  undefined4 extraout_XMM0_Dc_x00331;
  undefined4 extraout_XMM0_Dc_x00332;
  undefined4 extraout_XMM0_Dc_x00333;
  undefined4 extraout_XMM0_Dc_x00334;
  undefined4 extraout_XMM0_Dc_x00335;
  undefined4 extraout_XMM0_Dc_x00336;
  undefined4 extraout_XMM0_Dc_x00337;
  undefined4 extraout_XMM0_Dc_x00338;
  undefined4 extraout_XMM0_Dc_x00339;
  undefined4 extraout_XMM0_Dc_x00340;
  undefined4 extraout_XMM0_Dc_x00341;
  undefined4 extraout_XMM0_Dc_x00342;
  undefined4 extraout_XMM0_Dc_x00343;
  undefined4 extraout_XMM0_Dc_x00344;
  undefined4 extraout_XMM0_Dc_x00345;
  undefined4 extraout_XMM0_Dc_x00346;
  undefined4 extraout_XMM0_Dc_x00347;
  undefined4 extraout_XMM0_Dc_x00348;
  undefined4 extraout_XMM0_Dc_x00349;
  undefined4 extraout_XMM0_Dc_x00350;
  undefined4 extraout_XMM0_Dc_x00351;
  undefined4 extraout_XMM0_Dc_x00352;
  undefined4 extraout_XMM0_Dc_x00353;
  undefined4 extraout_XMM0_Dc_x00354;
  undefined4 extraout_XMM0_Dc_x00355;
  undefined4 extraout_XMM0_Dc_x00356;
  undefined4 extraout_XMM0_Dc_x00357;
  undefined4 extraout_XMM0_Dc_x00358;
  undefined4 extraout_XMM0_Dc_x00359;
  undefined4 extraout_XMM0_Dc_x00360;
  undefined4 extraout_XMM0_Dc_x00361;
  undefined4 extraout_XMM0_Dc_x00362;
  undefined4 extraout_XMM0_Dc_x00363;
  undefined4 extraout_XMM0_Dc_x00364;
  undefined4 extraout_XMM0_Dc_x00365;
  undefined4 extraout_XMM0_Dc_x00366;
  undefined4 extraout_XMM0_Dc_x00367;
  undefined4 extraout_XMM0_Dc_x00368;
  undefined4 extraout_XMM0_Dc_x00369;
  undefined4 extraout_XMM0_Dc_x00370;
  undefined4 extraout_XMM0_Dc_x00371;
  undefined4 extraout_XMM0_Dc_x00372;
  undefined4 extraout_XMM0_Dc_x00373;
  undefined4 extraout_XMM0_Dc_x00374;
  undefined4 extraout_XMM0_Dc_x00375;
  undefined4 extraout_XMM0_Dc_x00376;
  undefined4 extraout_XMM0_Dc_x00377;
  undefined4 extraout_XMM0_Dc_x00378;
  undefined4 extraout_XMM0_Dc_x00379;
  undefined4 extraout_XMM0_Dc_x00380;
  undefined4 extraout_XMM0_Dc_x00381;
  undefined4 extraout_XMM0_Dc_x00382;
  undefined4 extraout_XMM0_Dc_x00383;
  undefined4 extraout_XMM0_Dc_x00384;
  undefined4 extraout_XMM0_Dc_x00385;
  undefined4 extraout_XMM0_Dc_x00386;
  undefined4 extraout_XMM0_Dc_x00387;
  undefined4 extraout_XMM0_Dc_x00388;
  undefined4 extraout_XMM0_Dc_x00389;
  undefined4 extraout_XMM0_Dc_x00390;
  undefined4 extraout_XMM0_Dc_x00391;
  undefined4 extraout_XMM0_Dc_x00392;
  undefined4 extraout_XMM0_Dc_x00393;
  undefined4 extraout_XMM0_Dc_x00394;
  undefined4 extraout_XMM0_Dc_x00395;
  undefined4 extraout_XMM0_Dc_x00396;
  undefined4 extraout_XMM0_Dc_x00397;
  undefined4 extraout_XMM0_Dc_x00398;
  undefined4 extraout_XMM0_Dc_x00399;
  undefined4 extraout_XMM0_Dc_x00400;
  undefined4 extraout_XMM0_Dc_x00401;
  undefined4 extraout_XMM0_Dc_x00402;
  undefined4 extraout_XMM0_Dc_x00403;
  undefined4 extraout_XMM0_Dc_x00404;
  undefined4 extraout_XMM0_Dc_x00405;
  undefined4 extraout_XMM0_Dc_x00406;
  undefined4 extraout_XMM0_Dc_x00407;
  undefined4 extraout_XMM0_Dc_x00408;
  undefined4 extraout_XMM0_Dc_x00409;
  undefined4 extraout_XMM0_Dc_x00410;
  undefined4 extraout_XMM0_Dc_x00411;
  undefined4 extraout_XMM0_Dc_x00412;
  undefined4 extraout_XMM0_Dc_x00413;
  undefined4 extraout_XMM0_Dc_x00414;
  undefined4 extraout_XMM0_Dc_x00415;
  undefined4 extraout_XMM0_Dc_x00416;
  undefined4 extraout_XMM0_Dc_x00417;
  undefined4 extraout_XMM0_Dc_x00418;
  undefined4 extraout_XMM0_Dc_x00419;
  undefined4 extraout_XMM0_Dc_x00420;
  undefined4 extraout_XMM0_Dc_x00421;
  undefined4 extraout_XMM0_Dc_x00422;
  undefined4 extraout_XMM0_Dc_x00423;
  undefined4 extraout_XMM0_Dc_x00424;
  undefined4 extraout_XMM0_Dc_x00425;
  undefined4 extraout_XMM0_Dc_x00426;
  undefined4 extraout_XMM0_Dc_x00427;
  undefined4 extraout_XMM0_Dc_x00428;
  undefined4 extraout_XMM0_Dc_x00429;
  undefined4 extraout_XMM0_Dc_x00430;
  undefined4 extraout_XMM0_Dc_x00431;
  undefined4 extraout_XMM0_Dc_x00432;
  undefined4 extraout_XMM0_Dc_x00433;
  undefined4 extraout_XMM0_Dc_x00434;
  undefined4 extraout_XMM0_Dc_x00435;
  undefined4 extraout_XMM0_Dc_x00436;
  undefined4 extraout_XMM0_Dc_x00437;
  undefined4 extraout_XMM0_Dc_x00438;
  undefined4 extraout_XMM0_Dc_x00439;
  undefined4 extraout_XMM0_Dc_x00440;
  undefined4 extraout_XMM0_Dc_x00441;
  undefined4 extraout_XMM0_Dc_x00442;
  undefined4 extraout_XMM0_Dc_x00443;
  undefined4 extraout_XMM0_Dc_x00444;
  undefined4 extraout_XMM0_Dc_x00445;
  undefined4 extraout_XMM0_Dc_x00446;
  undefined4 extraout_XMM0_Dc_x00447;
  undefined4 extraout_XMM0_Dc_x00448;
  undefined4 extraout_XMM0_Dc_x00449;
  undefined4 extraout_XMM0_Dc_x00450;
  undefined4 extraout_XMM0_Dc_x00451;
  undefined4 extraout_XMM0_Dc_x00452;
  undefined4 extraout_XMM0_Dc_x00453;
  undefined4 extraout_XMM0_Dc_x00454;
  undefined4 extraout_XMM0_Dc_x00455;
  undefined4 extraout_XMM0_Dc_x00456;
  undefined4 extraout_XMM0_Dc_x00457;
  undefined4 extraout_XMM0_Dc_x00458;
  undefined4 extraout_XMM0_Dc_x00459;
  undefined4 extraout_XMM0_Dc_x00460;
  undefined4 extraout_XMM0_Dc_x00461;
  undefined4 extraout_XMM0_Dc_x00462;
  undefined4 extraout_XMM0_Dc_x00463;
  undefined4 extraout_XMM0_Dc_x00464;
  undefined4 extraout_XMM0_Dc_x00465;
  undefined4 extraout_XMM0_Dc_x00466;
  undefined4 extraout_XMM0_Dc_x00467;
  undefined4 extraout_XMM0_Dc_x00468;
  undefined4 extraout_XMM0_Dc_x00469;
  undefined4 extraout_XMM0_Dc_x00470;
  undefined4 extraout_XMM0_Dc_x00471;
  undefined4 extraout_XMM0_Dc_x00472;
  undefined4 extraout_XMM0_Dc_x00473;
  undefined4 extraout_XMM0_Dc_x00474;
  undefined4 extraout_XMM0_Dc_x00475;
  undefined4 extraout_XMM0_Dc_x00476;
  undefined4 extraout_XMM0_Dc_x00477;
  undefined4 extraout_XMM0_Dc_x00478;
  undefined4 extraout_XMM0_Dc_x00479;
  undefined4 extraout_XMM0_Dc_x00480;
  undefined4 extraout_XMM0_Dc_x00481;
  undefined4 extraout_XMM0_Dc_x00482;
  undefined4 extraout_XMM0_Dc_x00483;
  undefined4 extraout_XMM0_Dc_x00484;
  undefined4 extraout_XMM0_Dc_x00485;
  undefined4 extraout_XMM0_Dc_x00486;
  undefined4 extraout_XMM0_Dc_x00487;
  undefined4 extraout_XMM0_Dc_x00488;
  undefined4 extraout_XMM0_Dc_x00489;
  undefined4 extraout_XMM0_Dc_x00490;
  undefined4 extraout_XMM0_Dc_x00491;
  undefined4 extraout_XMM0_Dc_x00492;
  undefined4 extraout_XMM0_Dc_x00493;
  undefined4 extraout_XMM0_Dc_x00494;
  undefined4 extraout_XMM0_Dc_x00495;
  undefined4 extraout_XMM0_Dc_x00496;
  undefined4 extraout_XMM0_Dc_x00497;
  undefined4 extraout_XMM0_Dc_x00498;
  undefined4 extraout_XMM0_Dc_x00499;
  undefined4 extraout_XMM0_Dc_x00500;
  undefined4 extraout_XMM0_Dc_x00501;
  undefined4 extraout_XMM0_Dc_x00502;
  undefined4 extraout_XMM0_Dc_x00503;
  undefined4 extraout_XMM0_Dc_x00504;
  undefined4 extraout_XMM0_Dc_x00505;
  undefined4 extraout_XMM0_Dc_x00506;
  undefined4 extraout_XMM0_Dc_x00507;
  undefined4 extraout_XMM0_Dc_x00508;
  undefined4 extraout_XMM0_Dc_x00509;
  undefined4 extraout_XMM0_Dc_x00510;
  undefined4 extraout_XMM0_Dc_x00511;
  undefined4 extraout_XMM0_Dc_x00512;
  undefined4 extraout_XMM0_Dc_x00513;
  undefined4 extraout_XMM0_Dc_x00514;
  undefined4 extraout_XMM0_Dc_x00515;
  undefined4 extraout_XMM0_Dc_x00516;
  undefined4 extraout_XMM0_Dc_x00517;
  undefined4 extraout_XMM0_Dc_x00518;
  undefined4 extraout_XMM0_Dc_x00519;
  undefined4 extraout_XMM0_Dc_x00520;
  undefined4 extraout_XMM0_Dc_x00521;
  undefined4 extraout_XMM0_Dc_x00522;
  undefined4 extraout_XMM0_Dc_x00523;
  undefined4 extraout_XMM0_Dc_x00524;
  undefined4 extraout_XMM0_Dc_x00525;
  undefined4 extraout_XMM0_Dc_x00526;
  undefined4 extraout_XMM0_Dc_x00527;
  undefined4 extraout_XMM0_Dc_x00528;
  undefined4 extraout_XMM0_Dc_x00529;
  undefined4 extraout_XMM0_Dc_x00530;
  undefined4 extraout_XMM0_Dc_x00531;
  undefined4 extraout_XMM0_Dc_x00532;
  undefined4 extraout_XMM0_Dc_x00533;
  undefined4 extraout_XMM0_Dc_x00534;
  undefined4 extraout_XMM0_Dc_x00535;
  undefined4 extraout_XMM0_Dc_x00536;
  undefined4 extraout_XMM0_Dc_x00537;
  undefined4 extraout_XMM0_Dc_x00538;
  undefined4 extraout_XMM0_Dc_x00539;
  undefined4 extraout_XMM0_Dc_x00540;
  undefined4 extraout_XMM0_Dc_x00541;
  undefined4 extraout_XMM0_Dc_x00542;
  undefined4 extraout_XMM0_Dc_x00543;
  undefined4 extraout_XMM0_Dc_x00544;
  undefined4 extraout_XMM0_Dc_x00545;
  undefined4 extraout_XMM0_Dc_x00546;
  undefined4 extraout_XMM0_Dc_x00547;
  undefined4 extraout_XMM0_Dc_x00548;
  undefined4 extraout_XMM0_Dc_x00549;
  undefined4 extraout_XMM0_Dc_x00550;
  undefined4 extraout_XMM0_Dc_x00551;
  undefined4 extraout_XMM0_Dc_x00552;
  undefined4 extraout_XMM0_Dc_x00553;
  undefined4 extraout_XMM0_Dc_x00554;
  undefined4 extraout_XMM0_Dc_x00555;
  undefined4 extraout_XMM0_Dc_x00556;
  undefined4 extraout_XMM0_Dc_x00557;
  undefined4 extraout_XMM0_Dc_x00558;
  undefined4 extraout_XMM0_Dc_x00559;
  undefined4 extraout_XMM0_Dc_x00560;
  undefined4 extraout_XMM0_Dc_x00561;
  undefined4 extraout_XMM0_Dc_x00562;
  undefined4 extraout_XMM0_Dc_x00563;
  undefined4 extraout_XMM0_Dc_x00564;
  undefined4 extraout_XMM0_Dc_x00565;
  undefined4 extraout_XMM0_Dc_x00566;
  undefined4 extraout_XMM0_Dc_x00567;
  undefined4 extraout_XMM0_Dc_x00568;
  undefined4 extraout_XMM0_Dc_x00569;
  undefined4 extraout_XMM0_Dc_x00570;
  undefined4 extraout_XMM0_Dc_x00571;
  undefined4 extraout_XMM0_Dc_x00572;
  undefined4 extraout_XMM0_Dc_x00573;
  undefined4 extraout_XMM0_Dc_x00574;
  undefined4 extraout_XMM0_Dc_x00575;
  undefined4 extraout_XMM0_Dc_x00576;
  undefined4 extraout_XMM0_Dc_x00577;
  undefined4 extraout_XMM0_Dc_x00578;
  undefined4 extraout_XMM0_Dc_x00579;
  undefined4 extraout_XMM0_Dc_x00580;
  undefined4 extraout_XMM0_Dc_x00581;
  undefined4 extraout_XMM0_Dc_x00582;
  undefined4 extraout_XMM0_Dc_x00583;
  undefined4 extraout_XMM0_Dc_x00584;
  undefined4 extraout_XMM0_Dc_x00585;
  undefined4 extraout_XMM0_Dc_x00586;
  undefined4 extraout_XMM0_Dc_x00587;
  undefined4 extraout_XMM0_Dc_x00588;
  undefined4 extraout_XMM0_Dc_x00589;
  undefined4 extraout_XMM0_Dc_x00590;
  undefined4 extraout_XMM0_Dc_x00591;
  undefined4 extraout_XMM0_Dc_x00592;
  undefined4 extraout_XMM0_Dc_x00593;
  undefined4 extraout_XMM0_Dc_x00594;
  undefined4 extraout_XMM0_Dc_x00595;
  undefined4 extraout_XMM0_Dc_x00596;
  undefined4 extraout_XMM0_Dc_x00597;
  undefined4 extraout_XMM0_Dc_x00598;
  undefined4 extraout_XMM0_Dc_x00599;
  undefined4 extraout_XMM0_Dc_x00600;
  undefined4 extraout_XMM0_Dc_x00601;
  undefined4 extraout_XMM0_Dc_x00602;
  undefined4 extraout_XMM0_Dc_x00603;
  undefined4 extraout_XMM0_Dc_x00604;
  undefined4 extraout_XMM0_Dc_x00605;
  undefined4 extraout_XMM0_Dc_x00606;
  undefined4 extraout_XMM0_Dc_x00607;
  undefined4 extraout_XMM0_Dc_x00608;
  undefined4 extraout_XMM0_Dc_x00609;
  undefined4 extraout_XMM0_Dc_x00610;
  undefined4 extraout_XMM0_Dc_x00611;
  undefined4 extraout_XMM0_Dc_x00612;
  undefined4 extraout_XMM0_Dc_x00613;
  undefined4 extraout_XMM0_Dc_x00614;
  undefined4 extraout_XMM0_Dc_x00615;
  undefined4 extraout_XMM0_Dc_x00616;
  undefined4 extraout_XMM0_Dc_x00617;
  undefined4 extraout_XMM0_Dc_x00618;
  undefined4 extraout_XMM0_Dc_x00619;
  undefined4 extraout_XMM0_Dc_x00620;
  undefined4 extraout_XMM0_Dc_x00621;
  undefined4 extraout_XMM0_Dc_x00622;
  undefined4 extraout_XMM0_Dc_x00623;
  undefined4 extraout_XMM0_Dc_x00624;
  undefined4 extraout_XMM0_Dc_x00625;
  undefined4 extraout_XMM0_Dc_x00626;
  undefined4 extraout_XMM0_Dc_x00627;
  undefined4 extraout_XMM0_Dc_x00628;
  undefined4 extraout_XMM0_Dc_x00629;
  undefined4 extraout_XMM0_Dc_x00630;
  undefined4 extraout_XMM0_Dc_x00631;
  undefined4 extraout_XMM0_Dc_x00632;
  undefined4 extraout_XMM0_Dc_x00633;
  undefined4 extraout_XMM0_Dc_x00634;
  undefined4 extraout_XMM0_Dc_x00635;
  undefined4 extraout_XMM0_Dc_x00636;
  undefined4 extraout_XMM0_Dc_x00637;
  undefined4 extraout_XMM0_Dc_x00638;
  undefined4 extraout_XMM0_Dc_x00639;
  undefined4 extraout_XMM0_Dc_x00640;
  undefined4 extraout_XMM0_Dc_x00641;
  undefined4 extraout_XMM0_Dc_x00642;
  undefined4 extraout_XMM0_Dc_x00643;
  undefined4 extraout_XMM0_Dc_x00644;
  undefined4 extraout_XMM0_Dc_x00645;
  undefined4 extraout_XMM0_Dc_x00646;
  undefined4 extraout_XMM0_Dc_x00647;
  undefined4 extraout_XMM0_Dc_x00648;
  undefined4 extraout_XMM0_Dc_x00649;
  undefined4 extraout_XMM0_Dc_x00650;
  undefined4 extraout_XMM0_Dc_x00651;
  undefined4 extraout_XMM0_Dc_x00652;
  undefined4 extraout_XMM0_Dc_x00653;
  undefined4 extraout_XMM0_Dc_x00654;
  undefined4 extraout_XMM0_Dc_x00655;
  undefined4 extraout_XMM0_Dc_x00656;
  undefined4 extraout_XMM0_Dc_x00657;
  undefined4 extraout_XMM0_Dc_x00658;
  undefined4 extraout_XMM0_Dc_x00659;
  undefined4 extraout_XMM0_Dc_x00660;
  undefined4 extraout_XMM0_Dc_x00661;
  undefined4 extraout_XMM0_Dc_x00662;
  undefined4 extraout_XMM0_Dc_x00663;
  undefined4 extraout_XMM0_Dc_x00664;
  undefined4 extraout_XMM0_Dc_x00665;
  undefined4 extraout_XMM0_Dc_x00666;
  undefined4 extraout_XMM0_Dc_x00667;
  undefined4 extraout_XMM0_Dc_x00668;
  undefined4 extraout_XMM0_Dc_x00669;
  undefined4 extraout_XMM0_Dc_x00670;
  undefined4 extraout_XMM0_Dc_x00671;
  undefined4 extraout_XMM0_Dc_x00672;
  undefined4 extraout_XMM0_Dc_x00673;
  undefined4 extraout_XMM0_Dc_x00674;
  undefined4 extraout_XMM0_Dc_x00675;
  undefined4 extraout_XMM0_Dc_x00676;
  undefined4 extraout_XMM0_Dc_x00677;
  undefined4 extraout_XMM0_Dc_x00678;
  undefined4 extraout_XMM0_Dc_x00679;
  undefined4 extraout_XMM0_Dc_x00680;
  undefined4 extraout_XMM0_Dc_x00681;
  undefined4 extraout_XMM0_Dc_x00682;
  undefined4 extraout_XMM0_Dc_x00683;
  undefined4 extraout_XMM0_Dc_x00684;
  undefined4 extraout_XMM0_Dc_x00685;
  undefined4 extraout_XMM0_Dc_x00686;
  undefined4 extraout_XMM0_Dc_x00687;
  undefined4 extraout_XMM0_Dc_x00688;
  undefined4 extraout_XMM0_Dc_x00689;
  undefined4 extraout_XMM0_Dc_x00690;
  undefined4 extraout_XMM0_Dc_x00691;
  undefined4 extraout_XMM0_Dc_x00692;
  undefined4 extraout_XMM0_Dc_x00693;
  undefined4 extraout_XMM0_Dc_x00694;
  undefined4 extraout_XMM0_Dc_x00695;
  undefined4 extraout_XMM0_Dc_x00696;
  undefined4 extraout_XMM0_Dc_x00697;
  undefined4 extraout_XMM0_Dc_x00698;
  undefined4 extraout_XMM0_Dc_x00699;
  undefined4 extraout_XMM0_Dc_x00700;
  undefined4 extraout_XMM0_Dc_x00701;
  undefined4 extraout_XMM0_Dc_x00702;
  undefined4 extraout_XMM0_Dc_x00703;
  undefined4 extraout_XMM0_Dc_x00704;
  undefined4 extraout_XMM0_Dc_x00705;
  undefined4 extraout_XMM0_Dc_x00706;
  undefined4 extraout_XMM0_Dc_x00707;
  undefined4 extraout_XMM0_Dc_x00708;
  undefined4 extraout_XMM0_Dc_x00709;
  undefined4 extraout_XMM0_Dc_x00710;
  undefined4 extraout_XMM0_Dc_x00711;
  undefined4 extraout_XMM0_Dc_x00712;
  undefined4 extraout_XMM0_Dc_x00713;
  undefined4 extraout_XMM0_Dc_x00714;
  undefined4 extraout_XMM0_Dc_x00715;
  undefined4 extraout_XMM0_Dc_x00716;
  undefined4 extraout_XMM0_Dc_x00717;
  undefined4 extraout_XMM0_Dc_x00718;
  undefined4 extraout_XMM0_Dc_x00719;
  undefined4 extraout_XMM0_Dc_x00720;
  undefined4 extraout_XMM0_Dc_x00721;
  undefined4 extraout_XMM0_Dc_x00722;
  undefined4 extraout_XMM0_Dc_x00723;
  undefined4 extraout_XMM0_Dc_x00724;
  undefined4 extraout_XMM0_Dc_x00725;
  undefined4 extraout_XMM0_Dc_x00726;
  undefined4 extraout_XMM0_Dc_x00727;
  undefined4 extraout_XMM0_Dc_x00728;
  undefined4 extraout_XMM0_Dc_x00729;
  undefined4 extraout_XMM0_Dc_x00730;
  undefined4 extraout_XMM0_Dc_x00731;
  undefined4 extraout_XMM0_Dc_x00732;
  undefined4 extraout_XMM0_Dc_x00733;
  undefined4 extraout_XMM0_Dc_x00734;
  undefined4 extraout_XMM0_Dc_x00735;
  undefined4 extraout_XMM0_Dc_x00736;
  undefined4 extraout_XMM0_Dc_x00737;
  undefined4 extraout_XMM0_Dc_x00738;
  undefined4 extraout_XMM0_Dc_x00739;
  undefined4 extraout_XMM0_Dc_x00740;
  undefined4 extraout_XMM0_Dc_x00741;
  undefined4 extraout_XMM0_Dc_x00742;
  undefined4 extraout_XMM0_Dc_x00743;
  undefined4 extraout_XMM0_Dc_x00744;
  undefined4 extraout_XMM0_Dc_x00745;
  undefined4 extraout_XMM0_Dc_x00746;
  undefined4 extraout_XMM0_Dc_x00747;
  undefined4 extraout_XMM0_Dc_x00748;
  undefined4 extraout_XMM0_Dc_x00749;
  undefined4 extraout_XMM0_Dc_x00750;
  undefined4 extraout_XMM0_Dc_x00751;
  undefined4 extraout_XMM0_Dc_x00752;
  undefined4 extraout_XMM0_Dc_x00753;
  undefined4 extraout_XMM0_Dc_x00754;
  undefined4 extraout_XMM0_Dc_x00755;
  undefined4 extraout_XMM0_Dc_x00756;
  undefined4 extraout_XMM0_Dc_x00757;
  undefined4 extraout_XMM0_Dc_x00758;
  undefined4 extraout_XMM0_Dc_x00759;
  undefined4 extraout_XMM0_Dc_x00760;
  undefined4 extraout_XMM0_Dc_x00761;
  undefined4 extraout_XMM0_Dc_x00762;
  undefined4 extraout_XMM0_Dc_x00763;
  undefined4 extraout_XMM0_Dc_x00764;
  undefined4 extraout_XMM0_Dc_x00765;
  undefined4 extraout_XMM0_Dc_x00766;
  undefined4 extraout_XMM0_Dc_x00767;
  undefined4 extraout_XMM0_Dc_x00768;
  undefined4 extraout_XMM0_Dc_x00769;
  undefined4 extraout_XMM0_Dc_x00770;
  undefined4 extraout_XMM0_Dc_x00771;
  undefined4 extraout_XMM0_Dc_x00772;
  undefined4 extraout_XMM0_Dc_x00773;
  undefined4 extraout_XMM0_Dc_x00774;
  undefined4 extraout_XMM0_Dc_x00775;
  undefined4 extraout_XMM0_Dc_x00776;
  undefined4 extraout_XMM0_Dc_x00777;
  undefined4 extraout_XMM0_Dc_x00778;
  undefined4 extraout_XMM0_Dc_x00779;
  undefined4 extraout_XMM0_Dc_x00780;
  undefined4 extraout_XMM0_Dc_x00781;
  undefined4 extraout_XMM0_Dc_x00782;
  undefined4 extraout_XMM0_Dc_x00783;
  undefined4 extraout_XMM0_Dc_x00784;
  undefined4 extraout_XMM0_Dc_x00785;
  undefined4 extraout_XMM0_Dc_x00786;
  undefined4 extraout_XMM0_Dc_x00787;
  undefined4 extraout_XMM0_Dc_x00788;
  undefined4 extraout_XMM0_Dc_x00789;
  undefined4 extraout_XMM0_Dc_x00790;
  undefined4 extraout_XMM0_Dc_x00791;
  undefined4 extraout_XMM0_Dc_x00792;
  undefined4 extraout_XMM0_Dc_x00793;
  undefined4 extraout_XMM0_Dc_x00794;
  undefined4 extraout_XMM0_Dc_x00795;
  undefined4 extraout_XMM0_Dc_x00796;
  undefined4 extraout_XMM0_Dc_x00797;
  undefined4 extraout_XMM0_Dc_x00798;
  undefined4 extraout_XMM0_Dc_x00799;
  undefined4 extraout_XMM0_Dc_x00800;
  undefined4 extraout_XMM0_Dc_x00801;
  undefined4 extraout_XMM0_Dc_x00802;
  undefined4 extraout_XMM0_Dc_x00803;
  undefined4 extraout_XMM0_Dc_x00804;
  undefined4 extraout_XMM0_Dc_x00805;
  undefined4 extraout_XMM0_Dc_x00806;
  undefined4 extraout_XMM0_Dc_x00807;
  undefined4 extraout_XMM0_Dc_x00808;
  undefined4 extraout_XMM0_Dc_x00809;
  undefined4 extraout_XMM0_Dc_x00810;
  undefined4 extraout_XMM0_Dc_x00811;
  undefined4 extraout_XMM0_Dc_x00812;
  undefined4 extraout_XMM0_Dc_x00813;
  undefined4 extraout_XMM0_Dc_x00814;
  undefined4 extraout_XMM0_Dc_x00815;
  undefined4 extraout_XMM0_Dc_x00816;
  undefined4 extraout_XMM0_Dc_x00817;
  undefined4 extraout_XMM0_Dc_x00818;
  undefined4 extraout_XMM0_Dc_x00819;
  undefined4 extraout_XMM0_Dc_x00820;
  undefined4 extraout_XMM0_Dc_x00821;
  undefined4 extraout_XMM0_Dc_x00822;
  undefined4 extraout_XMM0_Dc_x00823;
  undefined4 extraout_XMM0_Dc_x00824;
  undefined4 extraout_XMM0_Dc_x00825;
  undefined4 extraout_XMM0_Dc_x00826;
  undefined4 extraout_XMM0_Dc_x00827;
  undefined4 extraout_XMM0_Dc_x00828;
  undefined4 extraout_XMM0_Dc_x00829;
  undefined4 extraout_XMM0_Dc_x00830;
  undefined4 extraout_XMM0_Dc_x00831;
  undefined4 extraout_XMM0_Dc_x00832;
  undefined4 extraout_XMM0_Dc_x00833;
  undefined4 extraout_XMM0_Dc_x00834;
  undefined4 extraout_XMM0_Dc_x00835;
  undefined4 extraout_XMM0_Dc_x00836;
  undefined4 extraout_XMM0_Dc_x00837;
  undefined4 extraout_XMM0_Dc_x00838;
  undefined4 extraout_XMM0_Dc_x00839;
  undefined4 extraout_XMM0_Dc_x00840;
  undefined4 extraout_XMM0_Dc_x00841;
  undefined4 extraout_XMM0_Dc_x00842;
  undefined4 extraout_XMM0_Dc_x00843;
  undefined4 extraout_XMM0_Dc_x00844;
  undefined4 extraout_XMM0_Dc_x00845;
  undefined4 extraout_XMM0_Dc_x00846;
  undefined4 extraout_XMM0_Dc_x00847;
  undefined4 extraout_XMM0_Dc_x00848;
  undefined4 extraout_XMM0_Dc_x00849;
  undefined4 extraout_XMM0_Dc_x00850;
  undefined4 extraout_XMM0_Dc_x00851;
  undefined4 extraout_XMM0_Dc_x00852;
  undefined4 extraout_XMM0_Dc_x00853;
  undefined4 extraout_XMM0_Dc_x00854;
  undefined4 extraout_XMM0_Dc_x00855;
  undefined4 extraout_XMM0_Dc_x00856;
  undefined4 extraout_XMM0_Dc_x00857;
  undefined4 extraout_XMM0_Dc_x00858;
  undefined4 extraout_XMM0_Dc_x00859;
  undefined4 extraout_XMM0_Dc_x00860;
  undefined4 extraout_XMM0_Dc_x00861;
  undefined4 extraout_XMM0_Dc_x00862;
  undefined4 extraout_XMM0_Dc_x00863;
  undefined4 extraout_XMM0_Dc_x00864;
  undefined4 extraout_XMM0_Dc_x00865;
  undefined4 extraout_XMM0_Dc_x00866;
  undefined4 extraout_XMM0_Dc_x00867;
  undefined4 extraout_XMM0_Dc_x00868;
  undefined4 extraout_XMM0_Dc_x00869;
  undefined4 extraout_XMM0_Dc_x00870;
  undefined4 extraout_XMM0_Dc_x00871;
  undefined4 extraout_XMM0_Dc_x00872;
  undefined4 extraout_XMM0_Dc_x00873;
  undefined4 extraout_XMM0_Dc_x00874;
  undefined4 extraout_XMM0_Dc_x00875;
  undefined4 extraout_XMM0_Dc_x00876;
  undefined4 extraout_XMM0_Dc_x00877;
  undefined4 extraout_XMM0_Dc_x00878;
  undefined4 extraout_XMM0_Dc_x00879;
  undefined4 extraout_XMM0_Dc_x00880;
  undefined4 extraout_XMM0_Dc_x00881;
  undefined4 extraout_XMM0_Dc_x00882;
  undefined4 extraout_XMM0_Dc_x00883;
  undefined4 extraout_XMM0_Dc_x00884;
  undefined4 extraout_XMM0_Dc_x00885;
  undefined4 extraout_XMM0_Dc_x00886;
  undefined4 extraout_XMM0_Dc_x00887;
  undefined4 extraout_XMM0_Dc_x00888;
  undefined4 extraout_XMM0_Dc_x00889;
  undefined4 extraout_XMM0_Dc_x00890;
  undefined4 extraout_XMM0_Dc_x00891;
  undefined4 extraout_XMM0_Dc_x00892;
  undefined4 extraout_XMM0_Dc_x00893;
  undefined4 extraout_XMM0_Dc_x00894;
  undefined4 extraout_XMM0_Dc_x00895;
  undefined4 extraout_XMM0_Dc_x00896;
  undefined4 extraout_XMM0_Dc_x00897;
  undefined4 extraout_XMM0_Dc_x00898;
  undefined4 extraout_XMM0_Dc_x00899;
  undefined4 extraout_XMM0_Dc_x00900;
  undefined4 extraout_XMM0_Dc_x00901;
  undefined4 extraout_XMM0_Dc_x00902;
  undefined4 extraout_XMM0_Dc_x00903;
  undefined4 extraout_XMM0_Dc_x00904;
  undefined4 extraout_XMM0_Dc_x00905;
  undefined4 extraout_XMM0_Dc_x00906;
  undefined4 extraout_XMM0_Dc_x00907;
  undefined4 extraout_XMM0_Dc_x00908;
  undefined4 extraout_XMM0_Dc_x00909;
  undefined4 extraout_XMM0_Dc_x00910;
  undefined4 extraout_XMM0_Dc_x00911;
  undefined4 extraout_XMM0_Dc_x00912;
  undefined4 extraout_XMM0_Dc_x00913;
  undefined4 extraout_XMM0_Dc_x00914;
  undefined4 extraout_XMM0_Dc_x00915;
  undefined4 extraout_XMM0_Dc_x00916;
  undefined4 extraout_XMM0_Dc_x00917;
  undefined4 extraout_XMM0_Dc_x00918;
  undefined4 extraout_XMM0_Dc_x00919;
  undefined4 extraout_XMM0_Dc_x00920;
  undefined4 extraout_XMM0_Dc_x00921;
  undefined4 extraout_XMM0_Dc_x00922;
  undefined4 extraout_XMM0_Dc_x00923;
  undefined4 extraout_XMM0_Dc_x00924;
  undefined4 extraout_XMM0_Dc_x00925;
  undefined4 extraout_XMM0_Dc_x00926;
  undefined4 extraout_XMM0_Dc_x00927;
  undefined4 extraout_XMM0_Dc_x00928;
  undefined4 extraout_XMM0_Dc_x00929;
  undefined4 extraout_XMM0_Dc_x00930;
  undefined4 extraout_XMM0_Dc_x00931;
  undefined4 extraout_XMM0_Dc_x00932;
  undefined4 extraout_XMM0_Dc_x00933;
  undefined4 extraout_XMM0_Dc_x00934;
  undefined4 extraout_XMM0_Dc_x00935;
  undefined4 extraout_XMM0_Dc_x00936;
  undefined4 extraout_XMM0_Dc_x00937;
  undefined4 extraout_XMM0_Dc_x00938;
  undefined4 extraout_XMM0_Dc_x00939;
  undefined4 extraout_XMM0_Dc_x00940;
  undefined4 extraout_XMM0_Dc_x00941;
  undefined4 extraout_XMM0_Dc_x00942;
  undefined4 extraout_XMM0_Dc_x00943;
  undefined4 extraout_XMM0_Dc_x00944;
  undefined4 extraout_XMM0_Dc_x00945;
  undefined4 extraout_XMM0_Dc_x00946;
  undefined4 extraout_XMM0_Dc_x00947;
  undefined4 extraout_XMM0_Dc_x00948;
  undefined4 extraout_XMM0_Dc_x00949;
  undefined4 extraout_XMM0_Dc_x00950;
  undefined4 extraout_XMM0_Dc_x00951;
  undefined4 extraout_XMM0_Dc_x00952;
  undefined4 extraout_XMM0_Dc_x00953;
  undefined4 extraout_XMM0_Dc_x00954;
  undefined4 extraout_XMM0_Dc_x00955;
  undefined4 extraout_XMM0_Dc_x00956;
  undefined4 extraout_XMM0_Dc_x00957;
  undefined4 extraout_XMM0_Dc_x00958;
  undefined4 extraout_XMM0_Dc_x00959;
  undefined4 extraout_XMM0_Dc_x00960;
  undefined4 extraout_XMM0_Dc_x00961;
  undefined4 extraout_XMM0_Dc_x00962;
  undefined4 extraout_XMM0_Dc_x00963;
  undefined4 extraout_XMM0_Dc_x00964;
  undefined4 extraout_XMM0_Dc_x00965;
  undefined4 extraout_XMM0_Dc_x00966;
  undefined4 extraout_XMM0_Dc_x00967;
  undefined4 extraout_XMM0_Dc_x00968;
  undefined4 extraout_XMM0_Dc_x00969;
  undefined4 extraout_XMM0_Dc_x00970;
  undefined4 extraout_XMM0_Dc_x00971;
  undefined4 extraout_XMM0_Dc_x00972;
  undefined4 extraout_XMM0_Dc_x00973;
  undefined4 extraout_XMM0_Dc_x00974;
  undefined4 extraout_XMM0_Dc_x00975;
  undefined4 extraout_XMM0_Dc_x00976;
  undefined4 extraout_XMM0_Dc_x00977;
  undefined4 extraout_XMM0_Dc_x00978;
  undefined4 extraout_XMM0_Dc_x00979;
  undefined4 extraout_XMM0_Dc_x00980;
  undefined4 extraout_XMM0_Dc_x00981;
  undefined4 extraout_XMM0_Dc_x00982;
  undefined4 extraout_XMM0_Dc_x00983;
  undefined4 extraout_XMM0_Dc_x00984;
  undefined4 extraout_XMM0_Dc_x00985;
  undefined4 extraout_XMM0_Dc_x00986;
  undefined4 extraout_XMM0_Dc_x00987;
  undefined4 extraout_XMM0_Dc_x00988;
  undefined4 extraout_XMM0_Dc_x00989;
  undefined4 extraout_XMM0_Dc_x00990;
  undefined4 extraout_XMM0_Dc_x00991;
  undefined4 extraout_XMM0_Dc_x00992;
  undefined4 extraout_XMM0_Dc_x00993;
  undefined4 extraout_XMM0_Dc_x00994;
  undefined4 extraout_XMM0_Dc_x00995;
  undefined4 extraout_XMM0_Dc_x00996;
  undefined4 extraout_XMM0_Dc_x00997;
  undefined4 extraout_XMM0_Dc_x00998;
  undefined4 extraout_XMM0_Dc_x00999;
  undefined4 extraout_XMM0_Dc_x01000;
  undefined4 extraout_XMM0_Dc_x01001;
  undefined4 extraout_XMM0_Dc_x01002;
  undefined4 extraout_XMM0_Dc_x01003;
  undefined4 extraout_XMM0_Dc_x01004;
  undefined4 extraout_XMM0_Dc_x01005;
  undefined4 extraout_XMM0_Dc_x01006;
  undefined4 extraout_XMM0_Dc_x01007;
  undefined4 extraout_XMM0_Dc_x01008;
  undefined4 extraout_XMM0_Dc_x01009;
  undefined4 extraout_XMM0_Dc_x01010;
  undefined4 extraout_XMM0_Dc_x01011;
  undefined4 extraout_XMM0_Dc_x01012;
  undefined4 extraout_XMM0_Dc_x01013;
  undefined4 extraout_XMM0_Dc_x01014;
  undefined4 extraout_XMM0_Dc_x01015;
  undefined4 extraout_XMM0_Dc_x01016;
  undefined4 extraout_XMM0_Dc_x01017;
  undefined4 extraout_XMM0_Dc_x01018;
  undefined4 extraout_XMM0_Dc_x01019;
  undefined4 extraout_XMM0_Dc_x01020;
  undefined4 extraout_XMM0_Dc_x01021;
  undefined4 extraout_XMM0_Dc_x01022;
  undefined4 extraout_XMM0_Dc_x01023;
  undefined4 extraout_XMM0_Dc_x01024;
  undefined4 extraout_XMM0_Dc_x01025;
  undefined4 extraout_XMM0_Dc_x01026;
  undefined4 extraout_XMM0_Dc_x01027;
  undefined4 extraout_XMM0_Dc_x01028;
  undefined4 extraout_XMM0_Dc_x01029;
  undefined4 extraout_XMM0_Dc_x01030;
  undefined4 extraout_XMM0_Dc_x01031;
  undefined4 extraout_XMM0_Dc_x01032;
  undefined4 extraout_XMM0_Dc_x01033;
  undefined4 extraout_XMM0_Dc_x01034;
  undefined4 extraout_XMM0_Dc_x01035;
  undefined4 extraout_XMM0_Dc_x01036;
  undefined4 extraout_XMM0_Dc_x01037;
  undefined4 extraout_XMM0_Dc_x01038;
  undefined4 extraout_XMM0_Dc_x01039;
  undefined4 extraout_XMM0_Dc_x01040;
  undefined4 extraout_XMM0_Dc_x01041;
  undefined4 extraout_XMM0_Dc_x01042;
  undefined4 extraout_XMM0_Dc_x01043;
  undefined4 extraout_XMM0_Dc_x01044;
  undefined4 extraout_XMM0_Dc_x01045;
  undefined4 extraout_XMM0_Dc_x01046;
  undefined4 extraout_XMM0_Dc_x01047;
  undefined4 extraout_XMM0_Dc_x01048;
  undefined4 extraout_XMM0_Dc_x01049;
  undefined4 extraout_XMM0_Dc_x01050;
  undefined4 extraout_XMM0_Dc_x01051;
  undefined4 extraout_XMM0_Dc_x01052;
  undefined4 extraout_XMM0_Dc_x01053;
  undefined4 extraout_XMM0_Dc_x01054;
  undefined4 extraout_XMM0_Dc_x01055;
  undefined4 extraout_XMM0_Dc_x01056;
  undefined4 extraout_XMM0_Dc_x01057;
  undefined4 extraout_XMM0_Dc_x01058;
  undefined4 extraout_XMM0_Dc_x01059;
  undefined4 extraout_XMM0_Dc_x01060;
  undefined4 extraout_XMM0_Dc_x01061;
  undefined4 extraout_XMM0_Dc_x01062;
  undefined4 extraout_XMM0_Dc_x01063;
  undefined4 extraout_XMM0_Dc_x01064;
  undefined4 extraout_XMM0_Dc_x01065;
  undefined4 extraout_XMM0_Dc_x01066;
  undefined4 extraout_XMM0_Dc_x01067;
  undefined4 extraout_XMM0_Dc_x01068;
  undefined4 extraout_XMM0_Dc_x01069;
  undefined4 extraout_XMM0_Dc_x01070;
  undefined4 extraout_XMM0_Dc_x01071;
  undefined4 extraout_XMM0_Dc_x01072;
  undefined4 extraout_XMM0_Dc_x01073;
  undefined4 extraout_XMM0_Dc_x01074;
  undefined4 extraout_XMM0_Dc_x01075;
  undefined4 extraout_XMM0_Dc_x01076;
  undefined4 extraout_XMM0_Dc_x01077;
  undefined4 extraout_XMM0_Dc_x01078;
  undefined4 extraout_XMM0_Dc_x01079;
  undefined4 extraout_XMM0_Dc_x01080;
  undefined4 extraout_XMM0_Dc_x01081;
  undefined4 extraout_XMM0_Dc_x01082;
  undefined4 extraout_XMM0_Dc_x01083;
  undefined4 extraout_XMM0_Dc_x01084;
  undefined4 extraout_XMM0_Dc_x01085;
  undefined4 extraout_XMM0_Dc_x01086;
  undefined4 extraout_XMM0_Dc_x01087;
  undefined4 extraout_XMM0_Dc_x01088;
  undefined4 extraout_XMM0_Dc_x01089;
  undefined4 extraout_XMM0_Dc_x01090;
  undefined4 extraout_XMM0_Dc_x01091;
  undefined4 extraout_XMM0_Dc_x01092;
  undefined4 extraout_XMM0_Dc_x01093;
  undefined4 extraout_XMM0_Dc_x01094;
  undefined4 extraout_XMM0_Dc_x01095;
  undefined4 extraout_XMM0_Dc_x01096;
  undefined4 extraout_XMM0_Dc_x01097;
  undefined4 extraout_XMM0_Dc_x01098;
  undefined4 extraout_XMM0_Dc_x01099;
  undefined4 extraout_XMM0_Dc_x01100;
  undefined4 extraout_XMM0_Dc_x01101;
  undefined4 extraout_XMM0_Dc_x01102;
  undefined4 extraout_XMM0_Dc_x01103;
  undefined4 extraout_XMM0_Dc_x01104;
  undefined4 extraout_XMM0_Dc_x01105;
  undefined4 extraout_XMM0_Dc_x01106;
  undefined4 extraout_XMM0_Dc_x01107;
  undefined4 extraout_XMM0_Dc_x01108;
  undefined4 extraout_XMM0_Dc_x01109;
  undefined4 extraout_XMM0_Dc_x01110;
  undefined4 extraout_XMM0_Dc_x01111;
  undefined4 extraout_XMM0_Dc_x01112;
  undefined4 extraout_XMM0_Dc_x01113;
  undefined4 extraout_XMM0_Dc_x01114;
  undefined4 extraout_XMM0_Dc_x01115;
  undefined4 extraout_XMM0_Dc_x01116;
  undefined4 extraout_XMM0_Dc_x01117;
  undefined4 extraout_XMM0_Dc_x01118;
  undefined4 extraout_XMM0_Dc_x01119;
  undefined4 extraout_XMM0_Dc_x01120;
  undefined4 extraout_XMM0_Dc_x01121;
  undefined4 extraout_XMM0_Dc_x01122;
  undefined4 extraout_XMM0_Dc_x01123;
  undefined4 extraout_XMM0_Dc_x01124;
  undefined4 extraout_XMM0_Dc_x01125;
  undefined4 extraout_XMM0_Dc_x01126;
  undefined4 extraout_XMM0_Dc_x01127;
  undefined4 extraout_XMM0_Dc_x01128;
  undefined4 extraout_XMM0_Dc_x01129;
  undefined4 extraout_XMM0_Dc_x01130;
  undefined4 extraout_XMM0_Dc_x01131;
  undefined4 extraout_XMM0_Dc_x01132;
  undefined4 extraout_XMM0_Dc_x01133;
  undefined4 extraout_XMM0_Dc_x01134;
  undefined4 extraout_XMM0_Dc_x01135;
  undefined4 extraout_XMM0_Dc_x01136;
  undefined4 extraout_XMM0_Dc_x01137;
  undefined4 extraout_XMM0_Dc_x01138;
  undefined4 extraout_XMM0_Dc_x01139;
  undefined4 extraout_XMM0_Dc_x01140;
  undefined4 extraout_XMM0_Dc_x01141;
  undefined4 extraout_XMM0_Dc_x01142;
  undefined4 extraout_XMM0_Dc_x01143;
  undefined4 extraout_XMM0_Dc_x01144;
  undefined4 extraout_XMM0_Dc_x01145;
  undefined4 extraout_XMM0_Dc_x01146;
  undefined4 extraout_XMM0_Dc_x01147;
  undefined4 extraout_XMM0_Dc_x01148;
  undefined4 extraout_XMM0_Dc_x01149;
  undefined4 extraout_XMM0_Dc_x01150;
  undefined4 extraout_XMM0_Dc_x01151;
  undefined4 extraout_XMM0_Dc_x01152;
  undefined4 extraout_XMM0_Dc_x01153;
  undefined4 extraout_XMM0_Dc_x01154;
  undefined4 extraout_XMM0_Dc_x01155;
  undefined4 extraout_XMM0_Dc_x01156;
  undefined4 extraout_XMM0_Dc_x01157;
  undefined4 extraout_XMM0_Dc_x01158;
  undefined4 extraout_XMM0_Dc_x01159;
  undefined4 extraout_XMM0_Dc_x01160;
  undefined4 extraout_XMM0_Dc_x01161;
  undefined4 extraout_XMM0_Dc_x01162;
  undefined4 extraout_XMM0_Dc_x01163;
  undefined4 extraout_XMM0_Dc_x01164;
  undefined4 extraout_XMM0_Dc_x01165;
  undefined4 extraout_XMM0_Dc_x01166;
  undefined4 extraout_XMM0_Dc_x01167;
  undefined4 extraout_XMM0_Dc_x01168;
  undefined4 extraout_XMM0_Dc_x01169;
  undefined4 extraout_XMM0_Dc_x01170;
  undefined4 extraout_XMM0_Dc_x01171;
  undefined4 extraout_XMM0_Dc_x01172;
  undefined4 extraout_XMM0_Dc_x01173;
  undefined4 extraout_XMM0_Dc_x01174;
  undefined4 extraout_XMM0_Dc_x01175;
  undefined4 extraout_XMM0_Dc_x01176;
  undefined4 extraout_XMM0_Dc_x01177;
  undefined4 extraout_XMM0_Dc_x01178;
  undefined4 extraout_XMM0_Dc_x01179;
  undefined4 extraout_XMM0_Dc_x01180;
  undefined4 extraout_XMM0_Dc_x01181;
  undefined4 extraout_XMM0_Dc_x01182;
  undefined4 extraout_XMM0_Dc_x01183;
  undefined4 extraout_XMM0_Dc_x01184;
  undefined4 extraout_XMM0_Dc_x01185;
  undefined4 extraout_XMM0_Dc_x01186;
  undefined4 extraout_XMM0_Dc_x01187;
  undefined4 extraout_XMM0_Dc_x01188;
  undefined4 extraout_XMM0_Dc_x01189;
  undefined4 extraout_XMM0_Dc_x01190;
  undefined4 extraout_XMM0_Dc_x01191;
  undefined4 extraout_XMM0_Dc_x01192;
  undefined4 extraout_XMM0_Dc_x01193;
  undefined4 extraout_XMM0_Dc_x01194;
  undefined4 extraout_XMM0_Dc_x01195;
  undefined4 extraout_XMM0_Dc_x01196;
  undefined4 extraout_XMM0_Dc_x01197;
  undefined4 extraout_XMM0_Dc_x01198;
  undefined4 extraout_XMM0_Dc_x01199;
  undefined4 extraout_XMM0_Dc_x01200;
  undefined4 extraout_XMM0_Dc_x01201;
  undefined4 extraout_XMM0_Dc_x01202;
  undefined4 extraout_XMM0_Dc_x01203;
  undefined4 extraout_XMM0_Dc_x01204;
  undefined4 extraout_XMM0_Dc_x01205;
  undefined4 extraout_XMM0_Dc_x01206;
  undefined4 extraout_XMM0_Dc_x01207;
  undefined4 extraout_XMM0_Dc_x01208;
  undefined4 extraout_XMM0_Dc_x01209;
  undefined4 extraout_XMM0_Dc_x01210;
  undefined4 extraout_XMM0_Dc_x01211;
  undefined4 extraout_XMM0_Dc_x01212;
  undefined4 extraout_XMM0_Dc_x01213;
  undefined4 extraout_XMM0_Dc_x01214;
  undefined4 extraout_XMM0_Dc_x01215;
  undefined4 extraout_XMM0_Dc_x01216;
  undefined4 extraout_XMM0_Dc_x01217;
  undefined4 extraout_XMM0_Dc_x01218;
  undefined4 extraout_XMM0_Dc_x01219;
  undefined4 extraout_XMM0_Dc_x01220;
  undefined4 extraout_XMM0_Dc_x01221;
  undefined4 extraout_XMM0_Dc_x01222;
  undefined4 extraout_XMM0_Dc_x01223;
  undefined4 extraout_XMM0_Dc_x01224;
  undefined4 extraout_XMM0_Dc_x01225;
  undefined4 extraout_XMM0_Dc_x01226;
  undefined4 extraout_XMM0_Dc_x01227;
  undefined4 extraout_XMM0_Dc_x01228;
  undefined4 extraout_XMM0_Dc_x01229;
  undefined4 extraout_XMM0_Dc_x01230;
  undefined4 extraout_XMM0_Dc_x01231;
  undefined4 extraout_XMM0_Dc_x01232;
  undefined4 extraout_XMM0_Dc_x01233;
  undefined4 extraout_XMM0_Dc_x01234;
  undefined4 extraout_XMM0_Dc_x01235;
  undefined4 extraout_XMM0_Dc_x01236;
  undefined4 extraout_XMM0_Dc_x01237;
  undefined4 extraout_XMM0_Dc_x01238;
  undefined4 extraout_XMM0_Dc_x01239;
  undefined4 extraout_XMM0_Dc_x01240;
  undefined4 extraout_XMM0_Dc_x01241;
  undefined4 extraout_XMM0_Dc_x01242;
  undefined4 extraout_XMM0_Dc_x01243;
  undefined4 extraout_XMM0_Dc_x01244;
  undefined4 extraout_XMM0_Dc_x01245;
  undefined4 extraout_XMM0_Dc_x01246;
  undefined4 extraout_XMM0_Dc_x01247;
  undefined4 extraout_XMM0_Dc_x01248;
  undefined4 extraout_XMM0_Dc_x01249;
  undefined4 extraout_XMM0_Dc_x01250;
  undefined4 extraout_XMM0_Dc_x01251;
  undefined4 extraout_XMM0_Dc_x01252;
  undefined4 extraout_XMM0_Dc_x01253;
  undefined4 extraout_XMM0_Dc_x01254;
  undefined4 extraout_XMM0_Dc_x01255;
  undefined4 extraout_XMM0_Dc_x01256;
  undefined4 extraout_XMM0_Dc_x01257;
  undefined4 extraout_XMM0_Dc_x01258;
  undefined4 extraout_XMM0_Dc_x01259;
  undefined4 extraout_XMM0_Dc_x01260;
  undefined4 extraout_XMM0_Dc_x01261;
  undefined4 extraout_XMM0_Dc_x01262;
  undefined4 extraout_XMM0_Dc_x01263;
  undefined4 extraout_XMM0_Dc_x01264;
  undefined4 extraout_XMM0_Dc_x01265;
  undefined4 extraout_XMM0_Dc_x01266;
  undefined4 extraout_XMM0_Dc_x01267;
  undefined4 extraout_XMM0_Dc_x01268;
  undefined4 extraout_XMM0_Dc_x01269;
  undefined4 extraout_XMM0_Dc_x01270;
  undefined4 extraout_XMM0_Dc_x01271;
  undefined4 extraout_XMM0_Dc_x01272;
  undefined4 extraout_XMM0_Dc_x01273;
  undefined4 extraout_XMM0_Dc_x01274;
  undefined4 extraout_XMM0_Dc_x01275;
  undefined4 extraout_XMM0_Dc_x01276;
  undefined4 extraout_XMM0_Dc_x01277;
  undefined4 extraout_XMM0_Dc_x01278;
  undefined4 extraout_XMM0_Dc_x01279;
  undefined4 extraout_XMM0_Dc_x01280;
  undefined4 extraout_XMM0_Dc_x01281;
  undefined4 extraout_XMM0_Dc_x01282;
  undefined4 extraout_XMM0_Dc_x01283;
  undefined4 extraout_XMM0_Dc_x01284;
  undefined4 extraout_XMM0_Dc_x01285;
  undefined4 extraout_XMM0_Dc_x01286;
  undefined4 extraout_XMM0_Dc_x01287;
  undefined4 extraout_XMM0_Dc_x01288;
  undefined4 extraout_XMM0_Dc_x01289;
  undefined4 extraout_XMM0_Dc_x01290;
  undefined4 extraout_XMM0_Dc_x01291;
  undefined4 extraout_XMM0_Dc_x01292;
  undefined4 extraout_XMM0_Dc_x01293;
  undefined4 extraout_XMM0_Dc_x01294;
  undefined4 extraout_XMM0_Dc_x01295;
  undefined4 extraout_XMM0_Dc_x01296;
  undefined4 extraout_XMM0_Dc_x01297;
  undefined4 extraout_XMM0_Dc_x01298;
  undefined4 extraout_XMM0_Dc_x01299;
  undefined4 extraout_XMM0_Dc_x01300;
  undefined4 extraout_XMM0_Dc_x01301;
  undefined4 extraout_XMM0_Dc_x01302;
  undefined4 extraout_XMM0_Dc_x01303;
  undefined4 extraout_XMM0_Dc_x01304;
  undefined4 extraout_XMM0_Dc_x01305;
  undefined4 extraout_XMM0_Dc_x01306;
  undefined4 extraout_XMM0_Dc_x01307;
  undefined4 extraout_XMM0_Dc_x01308;
  undefined4 extraout_XMM0_Dc_x01309;
  undefined4 extraout_XMM0_Dc_x01310;
  undefined4 extraout_XMM0_Dc_x01311;
  undefined4 extraout_XMM0_Dc_x01312;
  undefined4 extraout_XMM0_Dc_x01313;
  undefined4 extraout_XMM0_Dc_x01314;
  undefined4 extraout_XMM0_Dc_x01315;
  undefined4 extraout_XMM0_Dc_x01316;
  undefined4 extraout_XMM0_Dc_x01317;
  undefined4 extraout_XMM0_Dc_x01318;
  undefined4 extraout_XMM0_Dc_x01319;
  undefined4 extraout_XMM0_Dc_x01320;
  undefined4 extraout_XMM0_Dc_x01321;
  undefined4 extraout_XMM0_Dc_x01322;
  undefined4 extraout_XMM0_Dc_x01323;
  undefined4 extraout_XMM0_Dc_x01324;
  undefined4 extraout_XMM0_Dc_x01325;
  undefined4 extraout_XMM0_Dc_x01326;
  undefined4 extraout_XMM0_Dc_x01327;
  undefined4 extraout_XMM0_Dc_x01328;
  undefined4 extraout_XMM0_Dc_x01329;
  undefined4 extraout_XMM0_Dc_x01330;
  undefined4 extraout_XMM0_Dc_x01331;
  undefined4 extraout_XMM0_Dc_x01332;
  undefined4 extraout_XMM0_Dc_x01333;
  undefined4 extraout_XMM0_Dc_x01334;
  undefined4 extraout_XMM0_Dc_x01335;
  undefined4 extraout_XMM0_Dc_x01336;
  undefined4 extraout_XMM0_Dc_x01337;
  undefined4 extraout_XMM0_Dc_x01338;
  undefined4 extraout_XMM0_Dc_x01339;
  undefined4 extraout_XMM0_Dc_x01340;
  undefined4 extraout_XMM0_Dc_x01341;
  undefined4 extraout_XMM0_Dc_x01342;
  undefined4 extraout_XMM0_Dc_x01343;
  undefined4 extraout_XMM0_Dc_x01344;
  undefined4 extraout_XMM0_Dc_x01345;
  undefined4 extraout_XMM0_Dc_x01346;
  undefined4 extraout_XMM0_Dc_x01347;
  undefined4 extraout_XMM0_Dc_x01348;
  undefined4 extraout_XMM0_Dc_x01349;
  undefined4 extraout_XMM0_Dc_x01350;
  undefined4 extraout_XMM0_Dc_x01351;
  undefined4 extraout_XMM0_Dc_x01352;
  undefined4 extraout_XMM0_Dc_x01353;
  undefined4 extraout_XMM0_Dc_x01354;
  undefined4 extraout_XMM0_Dc_x01355;
  undefined4 extraout_XMM0_Dc_x01356;
  undefined4 extraout_XMM0_Dc_x01357;
  undefined4 extraout_XMM0_Dc_x01358;
  undefined4 extraout_XMM0_Dc_x01359;
  undefined4 extraout_XMM0_Dc_x01360;
  undefined4 extraout_XMM0_Dc_x01361;
  undefined4 extraout_XMM0_Dc_x01362;
  undefined4 extraout_XMM0_Dc_x01363;
  undefined4 extraout_XMM0_Dc_x01364;
  undefined4 extraout_XMM0_Dc_x01365;
  undefined4 extraout_XMM0_Dc_x01366;
  undefined4 extraout_XMM0_Dc_x01367;
  undefined4 extraout_XMM0_Dc_x01368;
  undefined4 extraout_XMM0_Dc_x01369;
  undefined4 extraout_XMM0_Dc_x01370;
  undefined4 extraout_XMM0_Dc_x01371;
  undefined4 extraout_XMM0_Dc_x01372;
  undefined4 extraout_XMM0_Dc_x01373;
  undefined4 extraout_XMM0_Dc_x01374;
  undefined4 extraout_XMM0_Dc_x01375;
  undefined4 extraout_XMM0_Dc_x01376;
  undefined4 extraout_XMM0_Dc_x01377;
  undefined4 extraout_XMM0_Dc_x01378;
  undefined4 extraout_XMM0_Dc_x01379;
  undefined4 extraout_XMM0_Dc_x01380;
  undefined4 extraout_XMM0_Dc_x01381;
  undefined4 extraout_XMM0_Dc_x01382;
  undefined4 extraout_XMM0_Dc_x01383;
  undefined4 extraout_XMM0_Dc_x01384;
  undefined4 extraout_XMM0_Dc_x01385;
  undefined4 extraout_XMM0_Dc_x01386;
  undefined4 extraout_XMM0_Dc_x01387;
  undefined4 extraout_XMM0_Dc_x01388;
  undefined4 extraout_XMM0_Dc_x01389;
  undefined4 extraout_XMM0_Dc_x01390;
  undefined4 extraout_XMM0_Dc_x01391;
  undefined4 extraout_XMM0_Dc_x01392;
  undefined4 extraout_XMM0_Dc_x01393;
  undefined4 extraout_XMM0_Dc_x01394;
  undefined4 extraout_XMM0_Dc_x01395;
  undefined4 extraout_XMM0_Dc_x01396;
  undefined4 extraout_XMM0_Dc_x01397;
  undefined4 extraout_XMM0_Dc_x01398;
  undefined4 extraout_XMM0_Dc_x01399;
  undefined4 extraout_XMM0_Dc_x01400;
  undefined4 extraout_XMM0_Dc_x01401;
  undefined4 extraout_XMM0_Dc_x01402;
  undefined4 extraout_XMM0_Dc_x01403;
  undefined4 extraout_XMM0_Dc_x01404;
  undefined4 extraout_XMM0_Dc_x01405;
  undefined4 extraout_XMM0_Dc_x01406;
  undefined4 extraout_XMM0_Dc_x01407;
  undefined4 extraout_XMM0_Dc_x01408;
  undefined4 extraout_XMM0_Dc_x01409;
  undefined4 extraout_XMM0_Dc_x01410;
  undefined4 extraout_XMM0_Dc_x01411;
  undefined4 extraout_XMM0_Dc_x01412;
  undefined4 extraout_XMM0_Dc_x01413;
  undefined4 extraout_XMM0_Dc_x01414;
  undefined4 extraout_XMM0_Dc_x01415;
  undefined4 extraout_XMM0_Dc_x01416;
  undefined4 extraout_XMM0_Dc_x01417;
  undefined4 extraout_XMM0_Dc_x01418;
  undefined4 extraout_XMM0_Dc_x01419;
  undefined4 extraout_XMM0_Dc_x01420;
  undefined4 extraout_XMM0_Dc_x01421;
  undefined4 extraout_XMM0_Dc_x01422;
  undefined4 extraout_XMM0_Dc_x01423;
  undefined4 extraout_XMM0_Dc_x01424;
  undefined4 extraout_XMM0_Dc_x01425;
  undefined4 extraout_XMM0_Dc_x01426;
  undefined4 extraout_XMM0_Dc_x01427;
  undefined4 extraout_XMM0_Dc_x01428;
  undefined4 extraout_XMM0_Dc_x01429;
  undefined4 extraout_XMM0_Dc_x01430;
  undefined4 extraout_XMM0_Dc_x01431;
  undefined4 extraout_XMM0_Dc_x01432;
  undefined4 extraout_XMM0_Dc_x01433;
  undefined4 extraout_XMM0_Dc_x01434;
  undefined4 extraout_XMM0_Dc_x01435;
  undefined4 extraout_XMM0_Dc_x01436;
  undefined4 extraout_XMM0_Dc_x01437;
  undefined4 extraout_XMM0_Dc_x01438;
  undefined4 extraout_XMM0_Dc_x01439;
  undefined4 extraout_XMM0_Dc_x01440;
  undefined4 extraout_XMM0_Dc_x01441;
  undefined4 extraout_XMM0_Dc_x01442;
  undefined4 extraout_XMM0_Dc_x01443;
  undefined4 extraout_XMM0_Dc_x01444;
  undefined4 extraout_XMM0_Dc_x01445;
  undefined4 extraout_XMM0_Dc_x01446;
  undefined4 extraout_XMM0_Dc_x01447;
  undefined4 extraout_XMM0_Dc_x01448;
  undefined4 extraout_XMM0_Dc_x01449;
  undefined4 extraout_XMM0_Dc_x01450;
  undefined4 extraout_XMM0_Dc_x01451;
  undefined4 extraout_XMM0_Dc_x01452;
  undefined4 extraout_XMM0_Dc_x01453;
  undefined4 extraout_XMM0_Dc_x01454;
  undefined4 extraout_XMM0_Dc_x01455;
  undefined4 extraout_XMM0_Dc_x01456;
  undefined4 extraout_XMM0_Dc_x01457;
  undefined4 extraout_XMM0_Dc_x01458;
  undefined4 extraout_XMM0_Dc_x01459;
  undefined4 extraout_XMM0_Dc_x01460;
  undefined4 extraout_XMM0_Dc_x01461;
  undefined4 extraout_XMM0_Dc_x01462;
  undefined4 extraout_XMM0_Dc_x01463;
  undefined4 extraout_XMM0_Dc_x01464;
  undefined4 extraout_XMM0_Dc_x01465;
  undefined4 extraout_XMM0_Dc_x01466;
  undefined4 extraout_XMM0_Dc_x01467;
  undefined4 extraout_XMM0_Dc_x01468;
  undefined4 extraout_XMM0_Dc_x01469;
  undefined4 extraout_XMM0_Dc_x01470;
  undefined4 extraout_XMM0_Dc_x01471;
  undefined4 extraout_XMM0_Dc_x01472;
  undefined4 extraout_XMM0_Dc_x01473;
  undefined4 extraout_XMM0_Dc_x01474;
  undefined4 extraout_XMM0_Dc_x01475;
  undefined4 extraout_XMM0_Dc_x01476;
  undefined4 extraout_XMM0_Dc_x01477;
  undefined4 extraout_XMM0_Dc_x01478;
  undefined4 extraout_XMM0_Dc_x01479;
  undefined4 extraout_XMM0_Dc_x01480;
  undefined4 extraout_XMM0_Dc_x01481;
  undefined4 extraout_XMM0_Dc_x01482;
  undefined4 extraout_XMM0_Dc_x01483;
  undefined4 extraout_XMM0_Dc_x01484;
  undefined4 extraout_XMM0_Dc_x01485;
  undefined4 extraout_XMM0_Dc_x01486;
  undefined4 extraout_XMM0_Dc_x01487;
  undefined4 extraout_XMM0_Dc_x01488;
  undefined4 extraout_XMM0_Dc_x01489;
  undefined4 extraout_XMM0_Dc_x01490;
  undefined4 extraout_XMM0_Dc_x01491;
  undefined4 extraout_XMM0_Dc_x01492;
  undefined4 extraout_XMM0_Dc_x01493;
  undefined4 extraout_XMM0_Dc_x01494;
  undefined4 extraout_XMM0_Dc_x01495;
  undefined4 extraout_XMM0_Dc_x01496;
  undefined4 extraout_XMM0_Dc_x01497;
  undefined4 extraout_XMM0_Dc_x01498;
  undefined4 extraout_XMM0_Dc_x01499;
  undefined4 extraout_XMM0_Dc_x01500;
  undefined4 extraout_XMM0_Dc_x01501;
  undefined4 extraout_XMM0_Dc_x01502;
  undefined4 extraout_XMM0_Dc_x01503;
  undefined4 extraout_XMM0_Dc_x01504;
  undefined4 extraout_XMM0_Dc_x01505;
  undefined4 extraout_XMM0_Dc_x01506;
  undefined4 extraout_XMM0_Dc_x01507;
  undefined4 extraout_XMM0_Dc_x01508;
  undefined4 extraout_XMM0_Dc_x01509;
  undefined4 extraout_XMM0_Dc_x01510;
  undefined4 extraout_XMM0_Dc_x01511;
  undefined4 extraout_XMM0_Dc_x01512;
  undefined4 extraout_XMM0_Dc_x01513;
  undefined4 extraout_XMM0_Dc_x01514;
  undefined4 extraout_XMM0_Dc_x01515;
  undefined4 extraout_XMM0_Dc_x01516;
  undefined4 extraout_XMM0_Dc_x01517;
  undefined4 extraout_XMM0_Dc_x01518;
  undefined4 extraout_XMM0_Dc_x01519;
  undefined4 extraout_XMM0_Dc_x01520;
  undefined4 extraout_XMM0_Dc_x01521;
  undefined4 extraout_XMM0_Dc_x01522;
  undefined4 extraout_XMM0_Dc_x01523;
  undefined4 extraout_XMM0_Dc_x01524;
  undefined4 extraout_XMM0_Dc_x01525;
  undefined4 extraout_XMM0_Dc_x01526;
  undefined4 extraout_XMM0_Dc_x01527;
  undefined4 extraout_XMM0_Dc_x01528;
  undefined4 extraout_XMM0_Dc_x01529;
  undefined4 extraout_XMM0_Dc_x01530;
  undefined4 extraout_XMM0_Dc_x01531;
  undefined4 extraout_XMM0_Dc_x01532;
  undefined4 extraout_XMM0_Dc_x01533;
  undefined4 extraout_XMM0_Dc_x01534;
  undefined4 extraout_XMM0_Dc_x01535;
  undefined4 extraout_XMM0_Dc_x01536;
  undefined4 extraout_XMM0_Dc_x01537;
  undefined4 extraout_XMM0_Dc_x01538;
  undefined4 extraout_XMM0_Dc_x01539;
  undefined4 extraout_XMM0_Dc_x01540;
  undefined4 extraout_XMM0_Dc_x01541;
  undefined4 extraout_XMM0_Dc_x01542;
  undefined4 extraout_XMM0_Dc_x01543;
  undefined4 extraout_XMM0_Dc_x01544;
  undefined4 extraout_XMM0_Dc_x01545;
  undefined4 extraout_XMM0_Dc_x01546;
  undefined4 extraout_XMM0_Dc_x01547;
  undefined4 extraout_XMM0_Dc_x01548;
  undefined4 extraout_XMM0_Dc_x01549;
  undefined4 extraout_XMM0_Dc_x01550;
  undefined4 extraout_XMM0_Dc_x01551;
  undefined4 extraout_XMM0_Dc_x01552;
  undefined4 extraout_XMM0_Dc_x01553;
  undefined4 extraout_XMM0_Dc_x01554;
  undefined4 extraout_XMM0_Dc_x01555;
  undefined4 extraout_XMM0_Dc_x01556;
  undefined4 extraout_XMM0_Dc_x01557;
  undefined4 extraout_XMM0_Dc_x01558;
  undefined4 extraout_XMM0_Dc_x01559;
  undefined4 extraout_XMM0_Dc_x01560;
  undefined4 extraout_XMM0_Dc_x01561;
  undefined4 extraout_XMM0_Dc_x01562;
  undefined4 extraout_XMM0_Dc_x01563;
  undefined4 extraout_XMM0_Dc_x01564;
  undefined4 extraout_XMM0_Dc_x01565;
  undefined4 extraout_XMM0_Dc_x01566;
  undefined4 extraout_XMM0_Dc_x01567;
  undefined4 extraout_XMM0_Dc_x01568;
  undefined4 extraout_XMM0_Dc_x01569;
  undefined4 extraout_XMM0_Dc_x01570;
  undefined4 extraout_XMM0_Dc_x01571;
  undefined4 extraout_XMM0_Dc_x01572;
  undefined4 extraout_XMM0_Dc_x01573;
  undefined4 extraout_XMM0_Dc_x01574;
  undefined4 extraout_XMM0_Dc_x01575;
  undefined4 extraout_XMM0_Dc_x01576;
  undefined4 extraout_XMM0_Dc_x01577;
  undefined4 extraout_XMM0_Dc_x01578;
  undefined4 extraout_XMM0_Dc_x01579;
  undefined4 extraout_XMM0_Dc_x01580;
  undefined4 extraout_XMM0_Dc_x01581;
  undefined4 extraout_XMM0_Dc_x01582;
  undefined4 extraout_XMM0_Dc_x01583;
  undefined4 extraout_XMM0_Dc_x01584;
  undefined4 extraout_XMM0_Dc_x01585;
  undefined4 extraout_XMM0_Dc_x01586;
  undefined4 extraout_XMM0_Dc_x01587;
  undefined4 extraout_XMM0_Dc_x01588;
  undefined4 extraout_XMM0_Dc_x01589;
  undefined4 extraout_XMM0_Dc_x01590;
  undefined4 extraout_XMM0_Dc_x01591;
  undefined4 extraout_XMM0_Dc_x01592;
  undefined4 extraout_XMM0_Dc_x01593;
  undefined4 extraout_XMM0_Dc_x01594;
  undefined4 extraout_XMM0_Dc_x01595;
  undefined4 extraout_XMM0_Dc_x01596;
  undefined4 extraout_XMM0_Dc_x01597;
  undefined4 extraout_XMM0_Dc_x01598;
  undefined4 extraout_XMM0_Dc_x01599;
  undefined4 extraout_XMM0_Dc_x01600;
  undefined4 extraout_XMM0_Dc_x01601;
  undefined4 extraout_XMM0_Dc_x01602;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  undefined4 extraout_XMM0_Dd_15;
  undefined4 extraout_XMM0_Dd_16;
  undefined4 extraout_XMM0_Dd_17;
  undefined4 extraout_XMM0_Dd_18;
  undefined4 extraout_XMM0_Dd_19;
  undefined4 extraout_XMM0_Dd_20;
  undefined4 extraout_XMM0_Dd_21;
  undefined4 extraout_XMM0_Dd_22;
  undefined4 extraout_XMM0_Dd_23;
  undefined4 extraout_XMM0_Dd_24;
  undefined4 extraout_XMM0_Dd_25;
  undefined4 extraout_XMM0_Dd_26;
  undefined4 extraout_XMM0_Dd_27;
  undefined4 extraout_XMM0_Dd_28;
  undefined4 extraout_XMM0_Dd_29;
  undefined4 extraout_XMM0_Dd_30;
  undefined4 extraout_XMM0_Dd_31;
  undefined4 extraout_XMM0_Dd_32;
  undefined4 extraout_XMM0_Dd_33;
  undefined4 extraout_XMM0_Dd_34;
  undefined4 extraout_XMM0_Dd_35;
  undefined4 extraout_XMM0_Dd_36;
  undefined4 extraout_XMM0_Dd_37;
  undefined4 extraout_XMM0_Dd_38;
  undefined4 extraout_XMM0_Dd_39;
  undefined4 extraout_XMM0_Dd_40;
  undefined4 extraout_XMM0_Dd_41;
  undefined4 extraout_XMM0_Dd_42;
  undefined4 extraout_XMM0_Dd_43;
  undefined4 extraout_XMM0_Dd_44;
  undefined4 extraout_XMM0_Dd_45;
  undefined4 extraout_XMM0_Dd_46;
  undefined4 extraout_XMM0_Dd_47;
  undefined4 extraout_XMM0_Dd_48;
  undefined4 extraout_XMM0_Dd_49;
  undefined4 extraout_XMM0_Dd_50;
  undefined4 extraout_XMM0_Dd_51;
  undefined4 extraout_XMM0_Dd_52;
  undefined4 extraout_XMM0_Dd_53;
  undefined4 extraout_XMM0_Dd_54;
  undefined4 extraout_XMM0_Dd_55;
  undefined4 extraout_XMM0_Dd_56;
  undefined4 extraout_XMM0_Dd_57;
  undefined4 extraout_XMM0_Dd_58;
  undefined4 extraout_XMM0_Dd_59;
  undefined4 extraout_XMM0_Dd_60;
  undefined4 extraout_XMM0_Dd_61;
  undefined4 extraout_XMM0_Dd_62;
  undefined4 extraout_XMM0_Dd_63;
  undefined4 extraout_XMM0_Dd_64;
  undefined4 extraout_XMM0_Dd_65;
  undefined4 extraout_XMM0_Dd_66;
  undefined4 extraout_XMM0_Dd_67;
  undefined4 extraout_XMM0_Dd_68;
  undefined4 extraout_XMM0_Dd_69;
  undefined4 extraout_XMM0_Dd_70;
  undefined4 extraout_XMM0_Dd_71;
  undefined4 extraout_XMM0_Dd_72;
  undefined4 extraout_XMM0_Dd_73;
  undefined4 extraout_XMM0_Dd_74;
  undefined4 extraout_XMM0_Dd_75;
  undefined4 extraout_XMM0_Dd_76;
  undefined4 extraout_XMM0_Dd_77;
  undefined4 extraout_XMM0_Dd_78;
  undefined4 extraout_XMM0_Dd_79;
  undefined4 extraout_XMM0_Dd_80;
  undefined4 extraout_XMM0_Dd_81;
  undefined4 extraout_XMM0_Dd_82;
  undefined4 extraout_XMM0_Dd_83;
  undefined4 extraout_XMM0_Dd_84;
  undefined4 extraout_XMM0_Dd_85;
  undefined4 extraout_XMM0_Dd_86;
  undefined4 extraout_XMM0_Dd_87;
  undefined4 extraout_XMM0_Dd_88;
  undefined4 extraout_XMM0_Dd_89;
  undefined4 extraout_XMM0_Dd_90;
  undefined4 extraout_XMM0_Dd_91;
  undefined4 extraout_XMM0_Dd_92;
  undefined4 extraout_XMM0_Dd_93;
  undefined4 extraout_XMM0_Dd_94;
  undefined4 extraout_XMM0_Dd_95;
  undefined4 extraout_XMM0_Dd_96;
  undefined4 extraout_XMM0_Dd_97;
  undefined4 extraout_XMM0_Dd_98;
  undefined4 extraout_XMM0_Dd_99;
  undefined4 extraout_XMM0_Dd_x00100;
  undefined4 extraout_XMM0_Dd_x00101;
  undefined4 extraout_XMM0_Dd_x00102;
  undefined4 extraout_XMM0_Dd_x00103;
  undefined4 extraout_XMM0_Dd_x00104;
  undefined4 extraout_XMM0_Dd_x00105;
  undefined4 extraout_XMM0_Dd_x00106;
  undefined4 extraout_XMM0_Dd_x00107;
  undefined4 extraout_XMM0_Dd_x00108;
  undefined4 extraout_XMM0_Dd_x00109;
  undefined4 extraout_XMM0_Dd_x00110;
  undefined4 extraout_XMM0_Dd_x00111;
  undefined4 extraout_XMM0_Dd_x00112;
  undefined4 extraout_XMM0_Dd_x00113;
  undefined4 extraout_XMM0_Dd_x00114;
  undefined4 extraout_XMM0_Dd_x00115;
  undefined4 extraout_XMM0_Dd_x00116;
  undefined4 extraout_XMM0_Dd_x00117;
  undefined4 extraout_XMM0_Dd_x00118;
  undefined4 extraout_XMM0_Dd_x00119;
  undefined4 extraout_XMM0_Dd_x00120;
  undefined4 extraout_XMM0_Dd_x00121;
  undefined4 extraout_XMM0_Dd_x00122;
  undefined4 extraout_XMM0_Dd_x00123;
  undefined4 extraout_XMM0_Dd_x00124;
  undefined4 extraout_XMM0_Dd_x00125;
  undefined4 extraout_XMM0_Dd_x00126;
  undefined4 extraout_XMM0_Dd_x00127;
  undefined4 extraout_XMM0_Dd_x00128;
  undefined4 extraout_XMM0_Dd_x00129;
  undefined4 extraout_XMM0_Dd_x00130;
  undefined4 extraout_XMM0_Dd_x00131;
  undefined4 extraout_XMM0_Dd_x00132;
  undefined4 extraout_XMM0_Dd_x00133;
  undefined4 extraout_XMM0_Dd_x00134;
  undefined4 extraout_XMM0_Dd_x00135;
  undefined4 extraout_XMM0_Dd_x00136;
  undefined4 extraout_XMM0_Dd_x00137;
  undefined4 extraout_XMM0_Dd_x00138;
  undefined4 extraout_XMM0_Dd_x00139;
  undefined4 extraout_XMM0_Dd_x00140;
  undefined4 extraout_XMM0_Dd_x00141;
  undefined4 extraout_XMM0_Dd_x00142;
  undefined4 extraout_XMM0_Dd_x00143;
  undefined4 extraout_XMM0_Dd_x00144;
  undefined4 extraout_XMM0_Dd_x00145;
  undefined4 extraout_XMM0_Dd_x00146;
  undefined4 extraout_XMM0_Dd_x00147;
  undefined4 extraout_XMM0_Dd_x00148;
  undefined4 extraout_XMM0_Dd_x00149;
  undefined4 extraout_XMM0_Dd_x00150;
  undefined4 extraout_XMM0_Dd_x00151;
  undefined4 extraout_XMM0_Dd_x00152;
  undefined4 extraout_XMM0_Dd_x00153;
  undefined4 extraout_XMM0_Dd_x00154;
  undefined4 extraout_XMM0_Dd_x00155;
  undefined4 extraout_XMM0_Dd_x00156;
  undefined4 extraout_XMM0_Dd_x00157;
  undefined4 extraout_XMM0_Dd_x00158;
  undefined4 extraout_XMM0_Dd_x00159;
  undefined4 extraout_XMM0_Dd_x00160;
  undefined4 extraout_XMM0_Dd_x00161;
  undefined4 extraout_XMM0_Dd_x00162;
  undefined4 extraout_XMM0_Dd_x00163;
  undefined4 extraout_XMM0_Dd_x00164;
  undefined4 extraout_XMM0_Dd_x00165;
  undefined4 extraout_XMM0_Dd_x00166;
  undefined4 extraout_XMM0_Dd_x00167;
  undefined4 extraout_XMM0_Dd_x00168;
  undefined4 extraout_XMM0_Dd_x00169;
  undefined4 extraout_XMM0_Dd_x00170;
  undefined4 extraout_XMM0_Dd_x00171;
  undefined4 extraout_XMM0_Dd_x00172;
  undefined4 extraout_XMM0_Dd_x00173;
  undefined4 extraout_XMM0_Dd_x00174;
  undefined4 extraout_XMM0_Dd_x00175;
  undefined4 extraout_XMM0_Dd_x00176;
  undefined4 extraout_XMM0_Dd_x00177;
  undefined4 extraout_XMM0_Dd_x00178;
  undefined4 extraout_XMM0_Dd_x00179;
  undefined4 extraout_XMM0_Dd_x00180;
  undefined4 extraout_XMM0_Dd_x00181;
  undefined4 extraout_XMM0_Dd_x00182;
  undefined4 extraout_XMM0_Dd_x00183;
  undefined4 extraout_XMM0_Dd_x00184;
  undefined4 extraout_XMM0_Dd_x00185;
  undefined4 extraout_XMM0_Dd_x00186;
  undefined4 extraout_XMM0_Dd_x00187;
  undefined4 extraout_XMM0_Dd_x00188;
  undefined4 extraout_XMM0_Dd_x00189;
  undefined4 extraout_XMM0_Dd_x00190;
  undefined4 extraout_XMM0_Dd_x00191;
  undefined4 extraout_XMM0_Dd_x00192;
  undefined4 extraout_XMM0_Dd_x00193;
  undefined4 extraout_XMM0_Dd_x00194;
  undefined4 extraout_XMM0_Dd_x00195;
  undefined4 extraout_XMM0_Dd_x00196;
  undefined4 extraout_XMM0_Dd_x00197;
  undefined4 extraout_XMM0_Dd_x00198;
  undefined4 extraout_XMM0_Dd_x00199;
  undefined4 extraout_XMM0_Dd_x00200;
  undefined4 extraout_XMM0_Dd_x00201;
  undefined4 extraout_XMM0_Dd_x00202;
  undefined4 extraout_XMM0_Dd_x00203;
  undefined4 extraout_XMM0_Dd_x00204;
  undefined4 extraout_XMM0_Dd_x00205;
  undefined4 extraout_XMM0_Dd_x00206;
  undefined4 extraout_XMM0_Dd_x00207;
  undefined4 extraout_XMM0_Dd_x00208;
  undefined4 extraout_XMM0_Dd_x00209;
  undefined4 extraout_XMM0_Dd_x00210;
  undefined4 extraout_XMM0_Dd_x00211;
  undefined4 extraout_XMM0_Dd_x00212;
  undefined4 extraout_XMM0_Dd_x00213;
  undefined4 extraout_XMM0_Dd_x00214;
  undefined4 extraout_XMM0_Dd_x00215;
  undefined4 extraout_XMM0_Dd_x00216;
  undefined4 extraout_XMM0_Dd_x00217;
  undefined4 extraout_XMM0_Dd_x00218;
  undefined4 extraout_XMM0_Dd_x00219;
  undefined4 extraout_XMM0_Dd_x00220;
  undefined4 extraout_XMM0_Dd_x00221;
  undefined4 extraout_XMM0_Dd_x00222;
  undefined4 extraout_XMM0_Dd_x00223;
  undefined4 extraout_XMM0_Dd_x00224;
  undefined4 extraout_XMM0_Dd_x00225;
  undefined4 extraout_XMM0_Dd_x00226;
  undefined4 extraout_XMM0_Dd_x00227;
  undefined4 extraout_XMM0_Dd_x00228;
  undefined4 extraout_XMM0_Dd_x00229;
  undefined4 extraout_XMM0_Dd_x00230;
  undefined4 extraout_XMM0_Dd_x00231;
  undefined4 extraout_XMM0_Dd_x00232;
  undefined4 extraout_XMM0_Dd_x00233;
  undefined4 extraout_XMM0_Dd_x00234;
  undefined4 extraout_XMM0_Dd_x00235;
  undefined4 extraout_XMM0_Dd_x00236;
  undefined4 extraout_XMM0_Dd_x00237;
  undefined4 extraout_XMM0_Dd_x00238;
  undefined4 extraout_XMM0_Dd_x00239;
  undefined4 extraout_XMM0_Dd_x00240;
  undefined4 extraout_XMM0_Dd_x00241;
  undefined4 extraout_XMM0_Dd_x00242;
  undefined4 extraout_XMM0_Dd_x00243;
  undefined4 extraout_XMM0_Dd_x00244;
  undefined4 extraout_XMM0_Dd_x00245;
  undefined4 extraout_XMM0_Dd_x00246;
  undefined4 extraout_XMM0_Dd_x00247;
  undefined4 extraout_XMM0_Dd_x00248;
  undefined4 extraout_XMM0_Dd_x00249;
  undefined4 extraout_XMM0_Dd_x00250;
  undefined4 extraout_XMM0_Dd_x00251;
  undefined4 extraout_XMM0_Dd_x00252;
  undefined4 extraout_XMM0_Dd_x00253;
  undefined4 extraout_XMM0_Dd_x00254;
  undefined4 extraout_XMM0_Dd_x00255;
  undefined4 extraout_XMM0_Dd_x00256;
  undefined4 extraout_XMM0_Dd_x00257;
  undefined4 extraout_XMM0_Dd_x00258;
  undefined4 extraout_XMM0_Dd_x00259;
  undefined4 extraout_XMM0_Dd_x00260;
  undefined4 extraout_XMM0_Dd_x00261;
  undefined4 extraout_XMM0_Dd_x00262;
  undefined4 extraout_XMM0_Dd_x00263;
  undefined4 extraout_XMM0_Dd_x00264;
  undefined4 extraout_XMM0_Dd_x00265;
  undefined4 extraout_XMM0_Dd_x00266;
  undefined4 extraout_XMM0_Dd_x00267;
  undefined4 extraout_XMM0_Dd_x00268;
  undefined4 extraout_XMM0_Dd_x00269;
  undefined4 extraout_XMM0_Dd_x00270;
  undefined4 extraout_XMM0_Dd_x00271;
  undefined4 extraout_XMM0_Dd_x00272;
  undefined4 extraout_XMM0_Dd_x00273;
  undefined4 extraout_XMM0_Dd_x00274;
  undefined4 extraout_XMM0_Dd_x00275;
  undefined4 extraout_XMM0_Dd_x00276;
  undefined4 extraout_XMM0_Dd_x00277;
  undefined4 extraout_XMM0_Dd_x00278;
  undefined4 extraout_XMM0_Dd_x00279;
  undefined4 extraout_XMM0_Dd_x00280;
  undefined4 extraout_XMM0_Dd_x00281;
  undefined4 extraout_XMM0_Dd_x00282;
  undefined4 extraout_XMM0_Dd_x00283;
  undefined4 extraout_XMM0_Dd_x00284;
  undefined4 extraout_XMM0_Dd_x00285;
  undefined4 extraout_XMM0_Dd_x00286;
  undefined4 extraout_XMM0_Dd_x00287;
  undefined4 extraout_XMM0_Dd_x00288;
  undefined4 extraout_XMM0_Dd_x00289;
  undefined4 extraout_XMM0_Dd_x00290;
  undefined4 extraout_XMM0_Dd_x00291;
  undefined4 extraout_XMM0_Dd_x00292;
  undefined4 extraout_XMM0_Dd_x00293;
  undefined4 extraout_XMM0_Dd_x00294;
  undefined4 extraout_XMM0_Dd_x00295;
  undefined4 extraout_XMM0_Dd_x00296;
  undefined4 extraout_XMM0_Dd_x00297;
  undefined4 extraout_XMM0_Dd_x00298;
  undefined4 extraout_XMM0_Dd_x00299;
  undefined4 extraout_XMM0_Dd_x00300;
  undefined4 extraout_XMM0_Dd_x00301;
  undefined4 extraout_XMM0_Dd_x00302;
  undefined4 extraout_XMM0_Dd_x00303;
  undefined4 extraout_XMM0_Dd_x00304;
  undefined4 extraout_XMM0_Dd_x00305;
  undefined4 extraout_XMM0_Dd_x00306;
  undefined4 extraout_XMM0_Dd_x00307;
  undefined4 extraout_XMM0_Dd_x00308;
  undefined4 extraout_XMM0_Dd_x00309;
  undefined4 extraout_XMM0_Dd_x00310;
  undefined4 extraout_XMM0_Dd_x00311;
  undefined4 extraout_XMM0_Dd_x00312;
  undefined4 extraout_XMM0_Dd_x00313;
  undefined4 extraout_XMM0_Dd_x00314;
  undefined4 extraout_XMM0_Dd_x00315;
  undefined4 extraout_XMM0_Dd_x00316;
  undefined4 extraout_XMM0_Dd_x00317;
  undefined4 extraout_XMM0_Dd_x00318;
  undefined4 extraout_XMM0_Dd_x00319;
  undefined4 extraout_XMM0_Dd_x00320;
  undefined4 extraout_XMM0_Dd_x00321;
  undefined4 extraout_XMM0_Dd_x00322;
  undefined4 extraout_XMM0_Dd_x00323;
  undefined4 extraout_XMM0_Dd_x00324;
  undefined4 extraout_XMM0_Dd_x00325;
  undefined4 extraout_XMM0_Dd_x00326;
  undefined4 extraout_XMM0_Dd_x00327;
  undefined4 extraout_XMM0_Dd_x00328;
  undefined4 extraout_XMM0_Dd_x00329;
  undefined4 extraout_XMM0_Dd_x00330;
  undefined4 extraout_XMM0_Dd_x00331;
  undefined4 extraout_XMM0_Dd_x00332;
  undefined4 extraout_XMM0_Dd_x00333;
  undefined4 extraout_XMM0_Dd_x00334;
  undefined4 extraout_XMM0_Dd_x00335;
  undefined4 extraout_XMM0_Dd_x00336;
  undefined4 extraout_XMM0_Dd_x00337;
  undefined4 extraout_XMM0_Dd_x00338;
  undefined4 extraout_XMM0_Dd_x00339;
  undefined4 extraout_XMM0_Dd_x00340;
  undefined4 extraout_XMM0_Dd_x00341;
  undefined4 extraout_XMM0_Dd_x00342;
  undefined4 extraout_XMM0_Dd_x00343;
  undefined4 extraout_XMM0_Dd_x00344;
  undefined4 extraout_XMM0_Dd_x00345;
  undefined4 extraout_XMM0_Dd_x00346;
  undefined4 extraout_XMM0_Dd_x00347;
  undefined4 extraout_XMM0_Dd_x00348;
  undefined4 extraout_XMM0_Dd_x00349;
  undefined4 extraout_XMM0_Dd_x00350;
  undefined4 extraout_XMM0_Dd_x00351;
  undefined4 extraout_XMM0_Dd_x00352;
  undefined4 extraout_XMM0_Dd_x00353;
  undefined4 extraout_XMM0_Dd_x00354;
  undefined4 extraout_XMM0_Dd_x00355;
  undefined4 extraout_XMM0_Dd_x00356;
  undefined4 extraout_XMM0_Dd_x00357;
  undefined4 extraout_XMM0_Dd_x00358;
  undefined4 extraout_XMM0_Dd_x00359;
  undefined4 extraout_XMM0_Dd_x00360;
  undefined4 extraout_XMM0_Dd_x00361;
  undefined4 extraout_XMM0_Dd_x00362;
  undefined4 extraout_XMM0_Dd_x00363;
  undefined4 extraout_XMM0_Dd_x00364;
  undefined4 extraout_XMM0_Dd_x00365;
  undefined4 extraout_XMM0_Dd_x00366;
  undefined4 extraout_XMM0_Dd_x00367;
  undefined4 extraout_XMM0_Dd_x00368;
  undefined4 extraout_XMM0_Dd_x00369;
  undefined4 extraout_XMM0_Dd_x00370;
  undefined4 extraout_XMM0_Dd_x00371;
  undefined4 extraout_XMM0_Dd_x00372;
  undefined4 extraout_XMM0_Dd_x00373;
  undefined4 extraout_XMM0_Dd_x00374;
  undefined4 extraout_XMM0_Dd_x00375;
  undefined4 extraout_XMM0_Dd_x00376;
  undefined4 extraout_XMM0_Dd_x00377;
  undefined4 extraout_XMM0_Dd_x00378;
  undefined4 extraout_XMM0_Dd_x00379;
  undefined4 extraout_XMM0_Dd_x00380;
  undefined4 extraout_XMM0_Dd_x00381;
  undefined4 extraout_XMM0_Dd_x00382;
  undefined4 extraout_XMM0_Dd_x00383;
  undefined4 extraout_XMM0_Dd_x00384;
  undefined4 extraout_XMM0_Dd_x00385;
  undefined4 extraout_XMM0_Dd_x00386;
  undefined4 extraout_XMM0_Dd_x00387;
  undefined4 extraout_XMM0_Dd_x00388;
  undefined4 extraout_XMM0_Dd_x00389;
  undefined4 extraout_XMM0_Dd_x00390;
  undefined4 extraout_XMM0_Dd_x00391;
  undefined4 extraout_XMM0_Dd_x00392;
  undefined4 extraout_XMM0_Dd_x00393;
  undefined4 extraout_XMM0_Dd_x00394;
  undefined4 extraout_XMM0_Dd_x00395;
  undefined4 extraout_XMM0_Dd_x00396;
  undefined4 extraout_XMM0_Dd_x00397;
  undefined4 extraout_XMM0_Dd_x00398;
  undefined4 extraout_XMM0_Dd_x00399;
  undefined4 extraout_XMM0_Dd_x00400;
  undefined4 extraout_XMM0_Dd_x00401;
  undefined4 extraout_XMM0_Dd_x00402;
  undefined4 extraout_XMM0_Dd_x00403;
  undefined4 extraout_XMM0_Dd_x00404;
  undefined4 extraout_XMM0_Dd_x00405;
  undefined4 extraout_XMM0_Dd_x00406;
  undefined4 extraout_XMM0_Dd_x00407;
  undefined4 extraout_XMM0_Dd_x00408;
  undefined4 extraout_XMM0_Dd_x00409;
  undefined4 extraout_XMM0_Dd_x00410;
  undefined4 extraout_XMM0_Dd_x00411;
  undefined4 extraout_XMM0_Dd_x00412;
  undefined4 extraout_XMM0_Dd_x00413;
  undefined4 extraout_XMM0_Dd_x00414;
  undefined4 extraout_XMM0_Dd_x00415;
  undefined4 extraout_XMM0_Dd_x00416;
  undefined4 extraout_XMM0_Dd_x00417;
  undefined4 extraout_XMM0_Dd_x00418;
  undefined4 extraout_XMM0_Dd_x00419;
  undefined4 extraout_XMM0_Dd_x00420;
  undefined4 extraout_XMM0_Dd_x00421;
  undefined4 extraout_XMM0_Dd_x00422;
  undefined4 extraout_XMM0_Dd_x00423;
  undefined4 extraout_XMM0_Dd_x00424;
  undefined4 extraout_XMM0_Dd_x00425;
  undefined4 extraout_XMM0_Dd_x00426;
  undefined4 extraout_XMM0_Dd_x00427;
  undefined4 extraout_XMM0_Dd_x00428;
  undefined4 extraout_XMM0_Dd_x00429;
  undefined4 extraout_XMM0_Dd_x00430;
  undefined4 extraout_XMM0_Dd_x00431;
  undefined4 extraout_XMM0_Dd_x00432;
  undefined4 extraout_XMM0_Dd_x00433;
  undefined4 extraout_XMM0_Dd_x00434;
  undefined4 extraout_XMM0_Dd_x00435;
  undefined4 extraout_XMM0_Dd_x00436;
  undefined4 extraout_XMM0_Dd_x00437;
  undefined4 extraout_XMM0_Dd_x00438;
  undefined4 extraout_XMM0_Dd_x00439;
  undefined4 extraout_XMM0_Dd_x00440;
  undefined4 extraout_XMM0_Dd_x00441;
  undefined4 extraout_XMM0_Dd_x00442;
  undefined4 extraout_XMM0_Dd_x00443;
  undefined4 extraout_XMM0_Dd_x00444;
  undefined4 extraout_XMM0_Dd_x00445;
  undefined4 extraout_XMM0_Dd_x00446;
  undefined4 extraout_XMM0_Dd_x00447;
  undefined4 extraout_XMM0_Dd_x00448;
  undefined4 extraout_XMM0_Dd_x00449;
  undefined4 extraout_XMM0_Dd_x00450;
  undefined4 extraout_XMM0_Dd_x00451;
  undefined4 extraout_XMM0_Dd_x00452;
  undefined4 extraout_XMM0_Dd_x00453;
  undefined4 extraout_XMM0_Dd_x00454;
  undefined4 extraout_XMM0_Dd_x00455;
  undefined4 extraout_XMM0_Dd_x00456;
  undefined4 extraout_XMM0_Dd_x00457;
  undefined4 extraout_XMM0_Dd_x00458;
  undefined4 extraout_XMM0_Dd_x00459;
  undefined4 extraout_XMM0_Dd_x00460;
  undefined4 extraout_XMM0_Dd_x00461;
  undefined4 extraout_XMM0_Dd_x00462;
  undefined4 extraout_XMM0_Dd_x00463;
  undefined4 extraout_XMM0_Dd_x00464;
  undefined4 extraout_XMM0_Dd_x00465;
  undefined4 extraout_XMM0_Dd_x00466;
  undefined4 extraout_XMM0_Dd_x00467;
  undefined4 extraout_XMM0_Dd_x00468;
  undefined4 extraout_XMM0_Dd_x00469;
  undefined4 extraout_XMM0_Dd_x00470;
  undefined4 extraout_XMM0_Dd_x00471;
  undefined4 extraout_XMM0_Dd_x00472;
  undefined4 extraout_XMM0_Dd_x00473;
  undefined4 extraout_XMM0_Dd_x00474;
  undefined4 extraout_XMM0_Dd_x00475;
  undefined4 extraout_XMM0_Dd_x00476;
  undefined4 extraout_XMM0_Dd_x00477;
  undefined4 extraout_XMM0_Dd_x00478;
  undefined4 extraout_XMM0_Dd_x00479;
  undefined4 extraout_XMM0_Dd_x00480;
  undefined4 extraout_XMM0_Dd_x00481;
  undefined4 extraout_XMM0_Dd_x00482;
  undefined4 extraout_XMM0_Dd_x00483;
  undefined4 extraout_XMM0_Dd_x00484;
  undefined4 extraout_XMM0_Dd_x00485;
  undefined4 extraout_XMM0_Dd_x00486;
  undefined4 extraout_XMM0_Dd_x00487;
  undefined4 extraout_XMM0_Dd_x00488;
  undefined4 extraout_XMM0_Dd_x00489;
  undefined4 extraout_XMM0_Dd_x00490;
  undefined4 extraout_XMM0_Dd_x00491;
  undefined4 extraout_XMM0_Dd_x00492;
  undefined4 extraout_XMM0_Dd_x00493;
  undefined4 extraout_XMM0_Dd_x00494;
  undefined4 extraout_XMM0_Dd_x00495;
  undefined4 extraout_XMM0_Dd_x00496;
  undefined4 extraout_XMM0_Dd_x00497;
  undefined4 extraout_XMM0_Dd_x00498;
  undefined4 extraout_XMM0_Dd_x00499;
  undefined4 extraout_XMM0_Dd_x00500;
  undefined4 extraout_XMM0_Dd_x00501;
  undefined4 extraout_XMM0_Dd_x00502;
  undefined4 extraout_XMM0_Dd_x00503;
  undefined4 extraout_XMM0_Dd_x00504;
  undefined4 extraout_XMM0_Dd_x00505;
  undefined4 extraout_XMM0_Dd_x00506;
  undefined4 extraout_XMM0_Dd_x00507;
  undefined4 extraout_XMM0_Dd_x00508;
  undefined4 extraout_XMM0_Dd_x00509;
  undefined4 extraout_XMM0_Dd_x00510;
  undefined4 extraout_XMM0_Dd_x00511;
  undefined4 extraout_XMM0_Dd_x00512;
  undefined4 extraout_XMM0_Dd_x00513;
  undefined4 extraout_XMM0_Dd_x00514;
  undefined4 extraout_XMM0_Dd_x00515;
  undefined4 extraout_XMM0_Dd_x00516;
  undefined4 extraout_XMM0_Dd_x00517;
  undefined4 extraout_XMM0_Dd_x00518;
  undefined4 extraout_XMM0_Dd_x00519;
  undefined4 extraout_XMM0_Dd_x00520;
  undefined4 extraout_XMM0_Dd_x00521;
  undefined4 extraout_XMM0_Dd_x00522;
  undefined4 extraout_XMM0_Dd_x00523;
  undefined4 extraout_XMM0_Dd_x00524;
  undefined4 extraout_XMM0_Dd_x00525;
  undefined4 extraout_XMM0_Dd_x00526;
  undefined4 extraout_XMM0_Dd_x00527;
  undefined4 extraout_XMM0_Dd_x00528;
  undefined4 extraout_XMM0_Dd_x00529;
  undefined4 extraout_XMM0_Dd_x00530;
  undefined4 extraout_XMM0_Dd_x00531;
  undefined4 extraout_XMM0_Dd_x00532;
  undefined4 extraout_XMM0_Dd_x00533;
  undefined4 extraout_XMM0_Dd_x00534;
  undefined4 extraout_XMM0_Dd_x00535;
  undefined4 extraout_XMM0_Dd_x00536;
  undefined4 extraout_XMM0_Dd_x00537;
  undefined4 extraout_XMM0_Dd_x00538;
  undefined4 extraout_XMM0_Dd_x00539;
  undefined4 extraout_XMM0_Dd_x00540;
  undefined4 extraout_XMM0_Dd_x00541;
  undefined4 extraout_XMM0_Dd_x00542;
  undefined4 extraout_XMM0_Dd_x00543;
  undefined4 extraout_XMM0_Dd_x00544;
  undefined4 extraout_XMM0_Dd_x00545;
  undefined4 extraout_XMM0_Dd_x00546;
  undefined4 extraout_XMM0_Dd_x00547;
  undefined4 extraout_XMM0_Dd_x00548;
  undefined4 extraout_XMM0_Dd_x00549;
  undefined4 extraout_XMM0_Dd_x00550;
  undefined4 extraout_XMM0_Dd_x00551;
  undefined4 extraout_XMM0_Dd_x00552;
  undefined4 extraout_XMM0_Dd_x00553;
  undefined4 extraout_XMM0_Dd_x00554;
  undefined4 extraout_XMM0_Dd_x00555;
  undefined4 extraout_XMM0_Dd_x00556;
  undefined4 extraout_XMM0_Dd_x00557;
  undefined4 extraout_XMM0_Dd_x00558;
  undefined4 extraout_XMM0_Dd_x00559;
  undefined4 extraout_XMM0_Dd_x00560;
  undefined4 extraout_XMM0_Dd_x00561;
  undefined4 extraout_XMM0_Dd_x00562;
  undefined4 extraout_XMM0_Dd_x00563;
  undefined4 extraout_XMM0_Dd_x00564;
  undefined4 extraout_XMM0_Dd_x00565;
  undefined4 extraout_XMM0_Dd_x00566;
  undefined4 extraout_XMM0_Dd_x00567;
  undefined4 extraout_XMM0_Dd_x00568;
  undefined4 extraout_XMM0_Dd_x00569;
  undefined4 extraout_XMM0_Dd_x00570;
  undefined4 extraout_XMM0_Dd_x00571;
  undefined4 extraout_XMM0_Dd_x00572;
  undefined4 extraout_XMM0_Dd_x00573;
  undefined4 extraout_XMM0_Dd_x00574;
  undefined4 extraout_XMM0_Dd_x00575;
  undefined4 extraout_XMM0_Dd_x00576;
  undefined4 extraout_XMM0_Dd_x00577;
  undefined4 extraout_XMM0_Dd_x00578;
  undefined4 extraout_XMM0_Dd_x00579;
  undefined4 extraout_XMM0_Dd_x00580;
  undefined4 extraout_XMM0_Dd_x00581;
  undefined4 extraout_XMM0_Dd_x00582;
  undefined4 extraout_XMM0_Dd_x00583;
  undefined4 extraout_XMM0_Dd_x00584;
  undefined4 extraout_XMM0_Dd_x00585;
  undefined4 extraout_XMM0_Dd_x00586;
  undefined4 extraout_XMM0_Dd_x00587;
  undefined4 extraout_XMM0_Dd_x00588;
  undefined4 extraout_XMM0_Dd_x00589;
  undefined4 extraout_XMM0_Dd_x00590;
  undefined4 extraout_XMM0_Dd_x00591;
  undefined4 extraout_XMM0_Dd_x00592;
  undefined4 extraout_XMM0_Dd_x00593;
  undefined4 extraout_XMM0_Dd_x00594;
  undefined4 extraout_XMM0_Dd_x00595;
  undefined4 extraout_XMM0_Dd_x00596;
  undefined4 extraout_XMM0_Dd_x00597;
  undefined4 extraout_XMM0_Dd_x00598;
  undefined4 extraout_XMM0_Dd_x00599;
  undefined4 extraout_XMM0_Dd_x00600;
  undefined4 extraout_XMM0_Dd_x00601;
  undefined4 extraout_XMM0_Dd_x00602;
  undefined4 extraout_XMM0_Dd_x00603;
  undefined4 extraout_XMM0_Dd_x00604;
  undefined4 extraout_XMM0_Dd_x00605;
  undefined4 extraout_XMM0_Dd_x00606;
  undefined4 extraout_XMM0_Dd_x00607;
  undefined4 extraout_XMM0_Dd_x00608;
  undefined4 extraout_XMM0_Dd_x00609;
  undefined4 extraout_XMM0_Dd_x00610;
  undefined4 extraout_XMM0_Dd_x00611;
  undefined4 extraout_XMM0_Dd_x00612;
  undefined4 extraout_XMM0_Dd_x00613;
  undefined4 extraout_XMM0_Dd_x00614;
  undefined4 extraout_XMM0_Dd_x00615;
  undefined4 extraout_XMM0_Dd_x00616;
  undefined4 extraout_XMM0_Dd_x00617;
  undefined4 extraout_XMM0_Dd_x00618;
  undefined4 extraout_XMM0_Dd_x00619;
  undefined4 extraout_XMM0_Dd_x00620;
  undefined4 extraout_XMM0_Dd_x00621;
  undefined4 extraout_XMM0_Dd_x00622;
  undefined4 extraout_XMM0_Dd_x00623;
  undefined4 extraout_XMM0_Dd_x00624;
  undefined4 extraout_XMM0_Dd_x00625;
  undefined4 extraout_XMM0_Dd_x00626;
  undefined4 extraout_XMM0_Dd_x00627;
  undefined4 extraout_XMM0_Dd_x00628;
  undefined4 extraout_XMM0_Dd_x00629;
  undefined4 extraout_XMM0_Dd_x00630;
  undefined4 extraout_XMM0_Dd_x00631;
  undefined4 extraout_XMM0_Dd_x00632;
  undefined4 extraout_XMM0_Dd_x00633;
  undefined4 extraout_XMM0_Dd_x00634;
  undefined4 extraout_XMM0_Dd_x00635;
  undefined4 extraout_XMM0_Dd_x00636;
  undefined4 extraout_XMM0_Dd_x00637;
  undefined4 extraout_XMM0_Dd_x00638;
  undefined4 extraout_XMM0_Dd_x00639;
  undefined4 extraout_XMM0_Dd_x00640;
  undefined4 extraout_XMM0_Dd_x00641;
  undefined4 extraout_XMM0_Dd_x00642;
  undefined4 extraout_XMM0_Dd_x00643;
  undefined4 extraout_XMM0_Dd_x00644;
  undefined4 extraout_XMM0_Dd_x00645;
  undefined4 extraout_XMM0_Dd_x00646;
  undefined4 extraout_XMM0_Dd_x00647;
  undefined4 extraout_XMM0_Dd_x00648;
  undefined4 extraout_XMM0_Dd_x00649;
  undefined4 extraout_XMM0_Dd_x00650;
  undefined4 extraout_XMM0_Dd_x00651;
  undefined4 extraout_XMM0_Dd_x00652;
  undefined4 extraout_XMM0_Dd_x00653;
  undefined4 extraout_XMM0_Dd_x00654;
  undefined4 extraout_XMM0_Dd_x00655;
  undefined4 extraout_XMM0_Dd_x00656;
  undefined4 extraout_XMM0_Dd_x00657;
  undefined4 extraout_XMM0_Dd_x00658;
  undefined4 extraout_XMM0_Dd_x00659;
  undefined4 extraout_XMM0_Dd_x00660;
  undefined4 extraout_XMM0_Dd_x00661;
  undefined4 extraout_XMM0_Dd_x00662;
  undefined4 extraout_XMM0_Dd_x00663;
  undefined4 extraout_XMM0_Dd_x00664;
  undefined4 extraout_XMM0_Dd_x00665;
  undefined4 extraout_XMM0_Dd_x00666;
  undefined4 extraout_XMM0_Dd_x00667;
  undefined4 extraout_XMM0_Dd_x00668;
  undefined4 extraout_XMM0_Dd_x00669;
  undefined4 extraout_XMM0_Dd_x00670;
  undefined4 extraout_XMM0_Dd_x00671;
  undefined4 extraout_XMM0_Dd_x00672;
  undefined4 extraout_XMM0_Dd_x00673;
  undefined4 extraout_XMM0_Dd_x00674;
  undefined4 extraout_XMM0_Dd_x00675;
  undefined4 extraout_XMM0_Dd_x00676;
  undefined4 extraout_XMM0_Dd_x00677;
  undefined4 extraout_XMM0_Dd_x00678;
  undefined4 extraout_XMM0_Dd_x00679;
  undefined4 extraout_XMM0_Dd_x00680;
  undefined4 extraout_XMM0_Dd_x00681;
  undefined4 extraout_XMM0_Dd_x00682;
  undefined4 extraout_XMM0_Dd_x00683;
  undefined4 extraout_XMM0_Dd_x00684;
  undefined4 extraout_XMM0_Dd_x00685;
  undefined4 extraout_XMM0_Dd_x00686;
  undefined4 extraout_XMM0_Dd_x00687;
  undefined4 extraout_XMM0_Dd_x00688;
  undefined4 extraout_XMM0_Dd_x00689;
  undefined4 extraout_XMM0_Dd_x00690;
  undefined4 extraout_XMM0_Dd_x00691;
  undefined4 extraout_XMM0_Dd_x00692;
  undefined4 extraout_XMM0_Dd_x00693;
  undefined4 extraout_XMM0_Dd_x00694;
  undefined4 extraout_XMM0_Dd_x00695;
  undefined4 extraout_XMM0_Dd_x00696;
  undefined4 extraout_XMM0_Dd_x00697;
  undefined4 extraout_XMM0_Dd_x00698;
  undefined4 extraout_XMM0_Dd_x00699;
  undefined4 extraout_XMM0_Dd_x00700;
  undefined4 extraout_XMM0_Dd_x00701;
  undefined4 extraout_XMM0_Dd_x00702;
  undefined4 extraout_XMM0_Dd_x00703;
  undefined4 extraout_XMM0_Dd_x00704;
  undefined4 extraout_XMM0_Dd_x00705;
  undefined4 extraout_XMM0_Dd_x00706;
  undefined4 extraout_XMM0_Dd_x00707;
  undefined4 extraout_XMM0_Dd_x00708;
  undefined4 extraout_XMM0_Dd_x00709;
  undefined4 extraout_XMM0_Dd_x00710;
  undefined4 extraout_XMM0_Dd_x00711;
  undefined4 extraout_XMM0_Dd_x00712;
  undefined4 extraout_XMM0_Dd_x00713;
  undefined4 extraout_XMM0_Dd_x00714;
  undefined4 extraout_XMM0_Dd_x00715;
  undefined4 extraout_XMM0_Dd_x00716;
  undefined4 extraout_XMM0_Dd_x00717;
  undefined4 extraout_XMM0_Dd_x00718;
  undefined4 extraout_XMM0_Dd_x00719;
  undefined4 extraout_XMM0_Dd_x00720;
  undefined4 extraout_XMM0_Dd_x00721;
  undefined4 extraout_XMM0_Dd_x00722;
  undefined4 extraout_XMM0_Dd_x00723;
  undefined4 extraout_XMM0_Dd_x00724;
  undefined4 extraout_XMM0_Dd_x00725;
  undefined4 extraout_XMM0_Dd_x00726;
  undefined4 extraout_XMM0_Dd_x00727;
  undefined4 extraout_XMM0_Dd_x00728;
  undefined4 extraout_XMM0_Dd_x00729;
  undefined4 extraout_XMM0_Dd_x00730;
  undefined4 extraout_XMM0_Dd_x00731;
  undefined4 extraout_XMM0_Dd_x00732;
  undefined4 extraout_XMM0_Dd_x00733;
  undefined4 extraout_XMM0_Dd_x00734;
  undefined4 extraout_XMM0_Dd_x00735;
  undefined4 extraout_XMM0_Dd_x00736;
  undefined4 extraout_XMM0_Dd_x00737;
  undefined4 extraout_XMM0_Dd_x00738;
  undefined4 extraout_XMM0_Dd_x00739;
  undefined4 extraout_XMM0_Dd_x00740;
  undefined4 extraout_XMM0_Dd_x00741;
  undefined4 extraout_XMM0_Dd_x00742;
  undefined4 extraout_XMM0_Dd_x00743;
  undefined4 extraout_XMM0_Dd_x00744;
  undefined4 extraout_XMM0_Dd_x00745;
  undefined4 extraout_XMM0_Dd_x00746;
  undefined4 extraout_XMM0_Dd_x00747;
  undefined4 extraout_XMM0_Dd_x00748;
  undefined4 extraout_XMM0_Dd_x00749;
  undefined4 extraout_XMM0_Dd_x00750;
  undefined4 extraout_XMM0_Dd_x00751;
  undefined4 extraout_XMM0_Dd_x00752;
  undefined4 extraout_XMM0_Dd_x00753;
  undefined4 extraout_XMM0_Dd_x00754;
  undefined4 extraout_XMM0_Dd_x00755;
  undefined4 extraout_XMM0_Dd_x00756;
  undefined4 extraout_XMM0_Dd_x00757;
  undefined4 extraout_XMM0_Dd_x00758;
  undefined4 extraout_XMM0_Dd_x00759;
  undefined4 extraout_XMM0_Dd_x00760;
  undefined4 extraout_XMM0_Dd_x00761;
  undefined4 extraout_XMM0_Dd_x00762;
  undefined4 extraout_XMM0_Dd_x00763;
  undefined4 extraout_XMM0_Dd_x00764;
  undefined4 extraout_XMM0_Dd_x00765;
  undefined4 extraout_XMM0_Dd_x00766;
  undefined4 extraout_XMM0_Dd_x00767;
  undefined4 extraout_XMM0_Dd_x00768;
  undefined4 extraout_XMM0_Dd_x00769;
  undefined4 extraout_XMM0_Dd_x00770;
  undefined4 extraout_XMM0_Dd_x00771;
  undefined4 extraout_XMM0_Dd_x00772;
  undefined4 extraout_XMM0_Dd_x00773;
  undefined4 extraout_XMM0_Dd_x00774;
  undefined4 extraout_XMM0_Dd_x00775;
  undefined4 extraout_XMM0_Dd_x00776;
  undefined4 extraout_XMM0_Dd_x00777;
  undefined4 extraout_XMM0_Dd_x00778;
  undefined4 extraout_XMM0_Dd_x00779;
  undefined4 extraout_XMM0_Dd_x00780;
  undefined4 extraout_XMM0_Dd_x00781;
  undefined4 extraout_XMM0_Dd_x00782;
  undefined4 extraout_XMM0_Dd_x00783;
  undefined4 extraout_XMM0_Dd_x00784;
  undefined4 extraout_XMM0_Dd_x00785;
  undefined4 extraout_XMM0_Dd_x00786;
  undefined4 extraout_XMM0_Dd_x00787;
  undefined4 extraout_XMM0_Dd_x00788;
  undefined4 extraout_XMM0_Dd_x00789;
  undefined4 extraout_XMM0_Dd_x00790;
  undefined4 extraout_XMM0_Dd_x00791;
  undefined4 extraout_XMM0_Dd_x00792;
  undefined4 extraout_XMM0_Dd_x00793;
  undefined4 extraout_XMM0_Dd_x00794;
  undefined4 extraout_XMM0_Dd_x00795;
  undefined4 extraout_XMM0_Dd_x00796;
  undefined4 extraout_XMM0_Dd_x00797;
  undefined4 extraout_XMM0_Dd_x00798;
  undefined4 extraout_XMM0_Dd_x00799;
  undefined4 extraout_XMM0_Dd_x00800;
  undefined4 extraout_XMM0_Dd_x00801;
  undefined4 extraout_XMM0_Dd_x00802;
  undefined4 extraout_XMM0_Dd_x00803;
  undefined4 extraout_XMM0_Dd_x00804;
  undefined4 extraout_XMM0_Dd_x00805;
  undefined4 extraout_XMM0_Dd_x00806;
  undefined4 extraout_XMM0_Dd_x00807;
  undefined4 extraout_XMM0_Dd_x00808;
  undefined4 extraout_XMM0_Dd_x00809;
  undefined4 extraout_XMM0_Dd_x00810;
  undefined4 extraout_XMM0_Dd_x00811;
  undefined4 extraout_XMM0_Dd_x00812;
  undefined4 extraout_XMM0_Dd_x00813;
  undefined4 extraout_XMM0_Dd_x00814;
  undefined4 extraout_XMM0_Dd_x00815;
  undefined4 extraout_XMM0_Dd_x00816;
  undefined4 extraout_XMM0_Dd_x00817;
  undefined4 extraout_XMM0_Dd_x00818;
  undefined4 extraout_XMM0_Dd_x00819;
  undefined4 extraout_XMM0_Dd_x00820;
  undefined4 extraout_XMM0_Dd_x00821;
  undefined4 extraout_XMM0_Dd_x00822;
  undefined4 extraout_XMM0_Dd_x00823;
  undefined4 extraout_XMM0_Dd_x00824;
  undefined4 extraout_XMM0_Dd_x00825;
  undefined4 extraout_XMM0_Dd_x00826;
  undefined4 extraout_XMM0_Dd_x00827;
  undefined4 extraout_XMM0_Dd_x00828;
  undefined4 extraout_XMM0_Dd_x00829;
  undefined4 extraout_XMM0_Dd_x00830;
  undefined4 extraout_XMM0_Dd_x00831;
  undefined4 extraout_XMM0_Dd_x00832;
  undefined4 extraout_XMM0_Dd_x00833;
  undefined4 extraout_XMM0_Dd_x00834;
  undefined4 extraout_XMM0_Dd_x00835;
  undefined4 extraout_XMM0_Dd_x00836;
  undefined4 extraout_XMM0_Dd_x00837;
  undefined4 extraout_XMM0_Dd_x00838;
  undefined4 extraout_XMM0_Dd_x00839;
  undefined4 extraout_XMM0_Dd_x00840;
  undefined4 extraout_XMM0_Dd_x00841;
  undefined4 extraout_XMM0_Dd_x00842;
  undefined4 extraout_XMM0_Dd_x00843;
  undefined4 extraout_XMM0_Dd_x00844;
  undefined4 extraout_XMM0_Dd_x00845;
  undefined4 extraout_XMM0_Dd_x00846;
  undefined4 extraout_XMM0_Dd_x00847;
  undefined4 extraout_XMM0_Dd_x00848;
  undefined4 extraout_XMM0_Dd_x00849;
  undefined4 extraout_XMM0_Dd_x00850;
  undefined4 extraout_XMM0_Dd_x00851;
  undefined4 extraout_XMM0_Dd_x00852;
  undefined4 extraout_XMM0_Dd_x00853;
  undefined4 extraout_XMM0_Dd_x00854;
  undefined4 extraout_XMM0_Dd_x00855;
  undefined4 extraout_XMM0_Dd_x00856;
  undefined4 extraout_XMM0_Dd_x00857;
  undefined4 extraout_XMM0_Dd_x00858;
  undefined4 extraout_XMM0_Dd_x00859;
  undefined4 extraout_XMM0_Dd_x00860;
  undefined4 extraout_XMM0_Dd_x00861;
  undefined4 extraout_XMM0_Dd_x00862;
  undefined4 extraout_XMM0_Dd_x00863;
  undefined4 extraout_XMM0_Dd_x00864;
  undefined4 extraout_XMM0_Dd_x00865;
  undefined4 extraout_XMM0_Dd_x00866;
  undefined4 extraout_XMM0_Dd_x00867;
  undefined4 extraout_XMM0_Dd_x00868;
  undefined4 extraout_XMM0_Dd_x00869;
  undefined4 extraout_XMM0_Dd_x00870;
  undefined4 extraout_XMM0_Dd_x00871;
  undefined4 extraout_XMM0_Dd_x00872;
  undefined4 extraout_XMM0_Dd_x00873;
  undefined4 extraout_XMM0_Dd_x00874;
  undefined4 extraout_XMM0_Dd_x00875;
  undefined4 extraout_XMM0_Dd_x00876;
  undefined4 extraout_XMM0_Dd_x00877;
  undefined4 extraout_XMM0_Dd_x00878;
  undefined4 extraout_XMM0_Dd_x00879;
  undefined4 extraout_XMM0_Dd_x00880;
  undefined4 extraout_XMM0_Dd_x00881;
  undefined4 extraout_XMM0_Dd_x00882;
  undefined4 extraout_XMM0_Dd_x00883;
  undefined4 extraout_XMM0_Dd_x00884;
  undefined4 extraout_XMM0_Dd_x00885;
  undefined4 extraout_XMM0_Dd_x00886;
  undefined4 extraout_XMM0_Dd_x00887;
  undefined4 extraout_XMM0_Dd_x00888;
  undefined4 extraout_XMM0_Dd_x00889;
  undefined4 extraout_XMM0_Dd_x00890;
  undefined4 extraout_XMM0_Dd_x00891;
  undefined4 extraout_XMM0_Dd_x00892;
  undefined4 extraout_XMM0_Dd_x00893;
  undefined4 extraout_XMM0_Dd_x00894;
  undefined4 extraout_XMM0_Dd_x00895;
  undefined4 extraout_XMM0_Dd_x00896;
  undefined4 extraout_XMM0_Dd_x00897;
  undefined4 extraout_XMM0_Dd_x00898;
  undefined4 extraout_XMM0_Dd_x00899;
  undefined4 extraout_XMM0_Dd_x00900;
  undefined4 extraout_XMM0_Dd_x00901;
  undefined4 extraout_XMM0_Dd_x00902;
  undefined4 extraout_XMM0_Dd_x00903;
  undefined4 extraout_XMM0_Dd_x00904;
  undefined4 extraout_XMM0_Dd_x00905;
  undefined4 extraout_XMM0_Dd_x00906;
  undefined4 extraout_XMM0_Dd_x00907;
  undefined4 extraout_XMM0_Dd_x00908;
  undefined4 extraout_XMM0_Dd_x00909;
  undefined4 extraout_XMM0_Dd_x00910;
  undefined4 extraout_XMM0_Dd_x00911;
  undefined4 extraout_XMM0_Dd_x00912;
  undefined4 extraout_XMM0_Dd_x00913;
  undefined4 extraout_XMM0_Dd_x00914;
  undefined4 extraout_XMM0_Dd_x00915;
  undefined4 extraout_XMM0_Dd_x00916;
  undefined4 extraout_XMM0_Dd_x00917;
  undefined4 extraout_XMM0_Dd_x00918;
  undefined4 extraout_XMM0_Dd_x00919;
  undefined4 extraout_XMM0_Dd_x00920;
  undefined4 extraout_XMM0_Dd_x00921;
  undefined4 extraout_XMM0_Dd_x00922;
  undefined4 extraout_XMM0_Dd_x00923;
  undefined4 extraout_XMM0_Dd_x00924;
  undefined4 extraout_XMM0_Dd_x00925;
  undefined4 extraout_XMM0_Dd_x00926;
  undefined4 extraout_XMM0_Dd_x00927;
  undefined4 extraout_XMM0_Dd_x00928;
  undefined4 extraout_XMM0_Dd_x00929;
  undefined4 extraout_XMM0_Dd_x00930;
  undefined4 extraout_XMM0_Dd_x00931;
  undefined4 extraout_XMM0_Dd_x00932;
  undefined4 extraout_XMM0_Dd_x00933;
  undefined4 extraout_XMM0_Dd_x00934;
  undefined4 extraout_XMM0_Dd_x00935;
  undefined4 extraout_XMM0_Dd_x00936;
  undefined4 extraout_XMM0_Dd_x00937;
  undefined4 extraout_XMM0_Dd_x00938;
  undefined4 extraout_XMM0_Dd_x00939;
  undefined4 extraout_XMM0_Dd_x00940;
  undefined4 extraout_XMM0_Dd_x00941;
  undefined4 extraout_XMM0_Dd_x00942;
  undefined4 extraout_XMM0_Dd_x00943;
  undefined4 extraout_XMM0_Dd_x00944;
  undefined4 extraout_XMM0_Dd_x00945;
  undefined4 extraout_XMM0_Dd_x00946;
  undefined4 extraout_XMM0_Dd_x00947;
  undefined4 extraout_XMM0_Dd_x00948;
  undefined4 extraout_XMM0_Dd_x00949;
  undefined4 extraout_XMM0_Dd_x00950;
  undefined4 extraout_XMM0_Dd_x00951;
  undefined4 extraout_XMM0_Dd_x00952;
  undefined4 extraout_XMM0_Dd_x00953;
  undefined4 extraout_XMM0_Dd_x00954;
  undefined4 extraout_XMM0_Dd_x00955;
  undefined4 extraout_XMM0_Dd_x00956;
  undefined4 extraout_XMM0_Dd_x00957;
  undefined4 extraout_XMM0_Dd_x00958;
  undefined4 extraout_XMM0_Dd_x00959;
  undefined4 extraout_XMM0_Dd_x00960;
  undefined4 extraout_XMM0_Dd_x00961;
  undefined4 extraout_XMM0_Dd_x00962;
  undefined4 extraout_XMM0_Dd_x00963;
  undefined4 extraout_XMM0_Dd_x00964;
  undefined4 extraout_XMM0_Dd_x00965;
  undefined4 extraout_XMM0_Dd_x00966;
  undefined4 extraout_XMM0_Dd_x00967;
  undefined4 extraout_XMM0_Dd_x00968;
  undefined4 extraout_XMM0_Dd_x00969;
  undefined4 extraout_XMM0_Dd_x00970;
  undefined4 extraout_XMM0_Dd_x00971;
  undefined4 extraout_XMM0_Dd_x00972;
  undefined4 extraout_XMM0_Dd_x00973;
  undefined4 extraout_XMM0_Dd_x00974;
  undefined4 extraout_XMM0_Dd_x00975;
  undefined4 extraout_XMM0_Dd_x00976;
  undefined4 extraout_XMM0_Dd_x00977;
  undefined4 extraout_XMM0_Dd_x00978;
  undefined4 extraout_XMM0_Dd_x00979;
  undefined4 extraout_XMM0_Dd_x00980;
  undefined4 extraout_XMM0_Dd_x00981;
  undefined4 extraout_XMM0_Dd_x00982;
  undefined4 extraout_XMM0_Dd_x00983;
  undefined4 extraout_XMM0_Dd_x00984;
  undefined4 extraout_XMM0_Dd_x00985;
  undefined4 extraout_XMM0_Dd_x00986;
  undefined4 extraout_XMM0_Dd_x00987;
  undefined4 extraout_XMM0_Dd_x00988;
  undefined4 extraout_XMM0_Dd_x00989;
  undefined4 extraout_XMM0_Dd_x00990;
  undefined4 extraout_XMM0_Dd_x00991;
  undefined4 extraout_XMM0_Dd_x00992;
  undefined4 extraout_XMM0_Dd_x00993;
  undefined4 extraout_XMM0_Dd_x00994;
  undefined4 extraout_XMM0_Dd_x00995;
  undefined4 extraout_XMM0_Dd_x00996;
  undefined4 extraout_XMM0_Dd_x00997;
  undefined4 extraout_XMM0_Dd_x00998;
  undefined4 extraout_XMM0_Dd_x00999;
  undefined4 extraout_XMM0_Dd_x01000;
  undefined4 extraout_XMM0_Dd_x01001;
  undefined4 extraout_XMM0_Dd_x01002;
  undefined4 extraout_XMM0_Dd_x01003;
  undefined4 extraout_XMM0_Dd_x01004;
  undefined4 extraout_XMM0_Dd_x01005;
  undefined4 extraout_XMM0_Dd_x01006;
  undefined4 extraout_XMM0_Dd_x01007;
  undefined4 extraout_XMM0_Dd_x01008;
  undefined4 extraout_XMM0_Dd_x01009;
  undefined4 extraout_XMM0_Dd_x01010;
  undefined4 extraout_XMM0_Dd_x01011;
  undefined4 extraout_XMM0_Dd_x01012;
  undefined4 extraout_XMM0_Dd_x01013;
  undefined4 extraout_XMM0_Dd_x01014;
  undefined4 extraout_XMM0_Dd_x01015;
  undefined4 extraout_XMM0_Dd_x01016;
  undefined4 extraout_XMM0_Dd_x01017;
  undefined4 extraout_XMM0_Dd_x01018;
  undefined4 extraout_XMM0_Dd_x01019;
  undefined4 extraout_XMM0_Dd_x01020;
  undefined4 extraout_XMM0_Dd_x01021;
  undefined4 extraout_XMM0_Dd_x01022;
  undefined4 extraout_XMM0_Dd_x01023;
  undefined4 extraout_XMM0_Dd_x01024;
  undefined4 extraout_XMM0_Dd_x01025;
  undefined4 extraout_XMM0_Dd_x01026;
  undefined4 extraout_XMM0_Dd_x01027;
  undefined4 extraout_XMM0_Dd_x01028;
  undefined4 extraout_XMM0_Dd_x01029;
  undefined4 extraout_XMM0_Dd_x01030;
  undefined4 extraout_XMM0_Dd_x01031;
  undefined4 extraout_XMM0_Dd_x01032;
  undefined4 extraout_XMM0_Dd_x01033;
  undefined4 extraout_XMM0_Dd_x01034;
  undefined4 extraout_XMM0_Dd_x01035;
  undefined4 extraout_XMM0_Dd_x01036;
  undefined4 extraout_XMM0_Dd_x01037;
  undefined4 extraout_XMM0_Dd_x01038;
  undefined4 extraout_XMM0_Dd_x01039;
  undefined4 extraout_XMM0_Dd_x01040;
  undefined4 extraout_XMM0_Dd_x01041;
  undefined4 extraout_XMM0_Dd_x01042;
  undefined4 extraout_XMM0_Dd_x01043;
  undefined4 extraout_XMM0_Dd_x01044;
  undefined4 extraout_XMM0_Dd_x01045;
  undefined4 extraout_XMM0_Dd_x01046;
  undefined4 extraout_XMM0_Dd_x01047;
  undefined4 extraout_XMM0_Dd_x01048;
  undefined4 extraout_XMM0_Dd_x01049;
  undefined4 extraout_XMM0_Dd_x01050;
  undefined4 extraout_XMM0_Dd_x01051;
  undefined4 extraout_XMM0_Dd_x01052;
  undefined4 extraout_XMM0_Dd_x01053;
  undefined4 extraout_XMM0_Dd_x01054;
  undefined4 extraout_XMM0_Dd_x01055;
  undefined4 extraout_XMM0_Dd_x01056;
  undefined4 extraout_XMM0_Dd_x01057;
  undefined4 extraout_XMM0_Dd_x01058;
  undefined4 extraout_XMM0_Dd_x01059;
  undefined4 extraout_XMM0_Dd_x01060;
  undefined4 extraout_XMM0_Dd_x01061;
  undefined4 extraout_XMM0_Dd_x01062;
  undefined4 extraout_XMM0_Dd_x01063;
  undefined4 extraout_XMM0_Dd_x01064;
  undefined4 extraout_XMM0_Dd_x01065;
  undefined4 extraout_XMM0_Dd_x01066;
  undefined4 extraout_XMM0_Dd_x01067;
  undefined4 extraout_XMM0_Dd_x01068;
  undefined4 extraout_XMM0_Dd_x01069;
  undefined4 extraout_XMM0_Dd_x01070;
  undefined4 extraout_XMM0_Dd_x01071;
  undefined4 extraout_XMM0_Dd_x01072;
  undefined4 extraout_XMM0_Dd_x01073;
  undefined4 extraout_XMM0_Dd_x01074;
  undefined4 extraout_XMM0_Dd_x01075;
  undefined4 extraout_XMM0_Dd_x01076;
  undefined4 extraout_XMM0_Dd_x01077;
  undefined4 extraout_XMM0_Dd_x01078;
  undefined4 extraout_XMM0_Dd_x01079;
  undefined4 extraout_XMM0_Dd_x01080;
  undefined4 extraout_XMM0_Dd_x01081;
  undefined4 extraout_XMM0_Dd_x01082;
  undefined4 extraout_XMM0_Dd_x01083;
  undefined4 extraout_XMM0_Dd_x01084;
  undefined4 extraout_XMM0_Dd_x01085;
  undefined4 extraout_XMM0_Dd_x01086;
  undefined4 extraout_XMM0_Dd_x01087;
  undefined4 extraout_XMM0_Dd_x01088;
  undefined4 extraout_XMM0_Dd_x01089;
  undefined4 extraout_XMM0_Dd_x01090;
  undefined4 extraout_XMM0_Dd_x01091;
  undefined4 extraout_XMM0_Dd_x01092;
  undefined4 extraout_XMM0_Dd_x01093;
  undefined4 extraout_XMM0_Dd_x01094;
  undefined4 extraout_XMM0_Dd_x01095;
  undefined4 extraout_XMM0_Dd_x01096;
  undefined4 extraout_XMM0_Dd_x01097;
  undefined4 extraout_XMM0_Dd_x01098;
  undefined4 extraout_XMM0_Dd_x01099;
  undefined4 extraout_XMM0_Dd_x01100;
  undefined4 extraout_XMM0_Dd_x01101;
  undefined4 extraout_XMM0_Dd_x01102;
  undefined4 extraout_XMM0_Dd_x01103;
  undefined4 extraout_XMM0_Dd_x01104;
  undefined4 extraout_XMM0_Dd_x01105;
  undefined4 extraout_XMM0_Dd_x01106;
  undefined4 extraout_XMM0_Dd_x01107;
  undefined4 extraout_XMM0_Dd_x01108;
  undefined4 extraout_XMM0_Dd_x01109;
  undefined4 extraout_XMM0_Dd_x01110;
  undefined4 extraout_XMM0_Dd_x01111;
  undefined4 extraout_XMM0_Dd_x01112;
  undefined4 extraout_XMM0_Dd_x01113;
  undefined4 extraout_XMM0_Dd_x01114;
  undefined4 extraout_XMM0_Dd_x01115;
  undefined4 extraout_XMM0_Dd_x01116;
  undefined4 extraout_XMM0_Dd_x01117;
  undefined4 extraout_XMM0_Dd_x01118;
  undefined4 extraout_XMM0_Dd_x01119;
  undefined4 extraout_XMM0_Dd_x01120;
  undefined4 extraout_XMM0_Dd_x01121;
  undefined4 extraout_XMM0_Dd_x01122;
  undefined4 extraout_XMM0_Dd_x01123;
  undefined4 extraout_XMM0_Dd_x01124;
  undefined4 extraout_XMM0_Dd_x01125;
  undefined4 extraout_XMM0_Dd_x01126;
  undefined4 extraout_XMM0_Dd_x01127;
  undefined4 extraout_XMM0_Dd_x01128;
  undefined4 extraout_XMM0_Dd_x01129;
  undefined4 extraout_XMM0_Dd_x01130;
  undefined4 extraout_XMM0_Dd_x01131;
  undefined4 extraout_XMM0_Dd_x01132;
  undefined4 extraout_XMM0_Dd_x01133;
  undefined4 extraout_XMM0_Dd_x01134;
  undefined4 extraout_XMM0_Dd_x01135;
  undefined4 extraout_XMM0_Dd_x01136;
  undefined4 extraout_XMM0_Dd_x01137;
  undefined4 extraout_XMM0_Dd_x01138;
  undefined4 extraout_XMM0_Dd_x01139;
  undefined4 extraout_XMM0_Dd_x01140;
  undefined4 extraout_XMM0_Dd_x01141;
  undefined4 extraout_XMM0_Dd_x01142;
  undefined4 extraout_XMM0_Dd_x01143;
  undefined4 extraout_XMM0_Dd_x01144;
  undefined4 extraout_XMM0_Dd_x01145;
  undefined4 extraout_XMM0_Dd_x01146;
  undefined4 extraout_XMM0_Dd_x01147;
  undefined4 extraout_XMM0_Dd_x01148;
  undefined4 extraout_XMM0_Dd_x01149;
  undefined4 extraout_XMM0_Dd_x01150;
  undefined4 extraout_XMM0_Dd_x01151;
  undefined4 extraout_XMM0_Dd_x01152;
  undefined4 extraout_XMM0_Dd_x01153;
  undefined4 extraout_XMM0_Dd_x01154;
  undefined4 extraout_XMM0_Dd_x01155;
  undefined4 extraout_XMM0_Dd_x01156;
  undefined4 extraout_XMM0_Dd_x01157;
  undefined4 extraout_XMM0_Dd_x01158;
  undefined4 extraout_XMM0_Dd_x01159;
  undefined4 extraout_XMM0_Dd_x01160;
  undefined4 extraout_XMM0_Dd_x01161;
  undefined4 extraout_XMM0_Dd_x01162;
  undefined4 extraout_XMM0_Dd_x01163;
  undefined4 extraout_XMM0_Dd_x01164;
  undefined4 extraout_XMM0_Dd_x01165;
  undefined4 extraout_XMM0_Dd_x01166;
  undefined4 extraout_XMM0_Dd_x01167;
  undefined4 extraout_XMM0_Dd_x01168;
  undefined4 extraout_XMM0_Dd_x01169;
  undefined4 extraout_XMM0_Dd_x01170;
  undefined4 extraout_XMM0_Dd_x01171;
  undefined4 extraout_XMM0_Dd_x01172;
  undefined4 extraout_XMM0_Dd_x01173;
  undefined4 extraout_XMM0_Dd_x01174;
  undefined4 extraout_XMM0_Dd_x01175;
  undefined4 extraout_XMM0_Dd_x01176;
  undefined4 extraout_XMM0_Dd_x01177;
  undefined4 extraout_XMM0_Dd_x01178;
  undefined4 extraout_XMM0_Dd_x01179;
  undefined4 extraout_XMM0_Dd_x01180;
  undefined4 extraout_XMM0_Dd_x01181;
  undefined4 extraout_XMM0_Dd_x01182;
  undefined4 extraout_XMM0_Dd_x01183;
  undefined4 extraout_XMM0_Dd_x01184;
  undefined4 extraout_XMM0_Dd_x01185;
  undefined4 extraout_XMM0_Dd_x01186;
  undefined4 extraout_XMM0_Dd_x01187;
  undefined4 extraout_XMM0_Dd_x01188;
  undefined4 extraout_XMM0_Dd_x01189;
  undefined4 extraout_XMM0_Dd_x01190;
  undefined4 extraout_XMM0_Dd_x01191;
  undefined4 extraout_XMM0_Dd_x01192;
  undefined4 extraout_XMM0_Dd_x01193;
  undefined4 extraout_XMM0_Dd_x01194;
  undefined4 extraout_XMM0_Dd_x01195;
  undefined4 extraout_XMM0_Dd_x01196;
  undefined4 extraout_XMM0_Dd_x01197;
  undefined4 extraout_XMM0_Dd_x01198;
  undefined4 extraout_XMM0_Dd_x01199;
  undefined4 extraout_XMM0_Dd_x01200;
  undefined4 extraout_XMM0_Dd_x01201;
  undefined4 extraout_XMM0_Dd_x01202;
  undefined4 extraout_XMM0_Dd_x01203;
  undefined4 extraout_XMM0_Dd_x01204;
  undefined4 extraout_XMM0_Dd_x01205;
  undefined4 extraout_XMM0_Dd_x01206;
  undefined4 extraout_XMM0_Dd_x01207;
  undefined4 extraout_XMM0_Dd_x01208;
  undefined4 extraout_XMM0_Dd_x01209;
  undefined4 extraout_XMM0_Dd_x01210;
  undefined4 extraout_XMM0_Dd_x01211;
  undefined4 extraout_XMM0_Dd_x01212;
  undefined4 extraout_XMM0_Dd_x01213;
  undefined4 extraout_XMM0_Dd_x01214;
  undefined4 extraout_XMM0_Dd_x01215;
  undefined4 extraout_XMM0_Dd_x01216;
  undefined4 extraout_XMM0_Dd_x01217;
  undefined4 extraout_XMM0_Dd_x01218;
  undefined4 extraout_XMM0_Dd_x01219;
  undefined4 extraout_XMM0_Dd_x01220;
  undefined4 extraout_XMM0_Dd_x01221;
  undefined4 extraout_XMM0_Dd_x01222;
  undefined4 extraout_XMM0_Dd_x01223;
  undefined4 extraout_XMM0_Dd_x01224;
  undefined4 extraout_XMM0_Dd_x01225;
  undefined4 extraout_XMM0_Dd_x01226;
  undefined4 extraout_XMM0_Dd_x01227;
  undefined4 extraout_XMM0_Dd_x01228;
  undefined4 extraout_XMM0_Dd_x01229;
  undefined4 extraout_XMM0_Dd_x01230;
  undefined4 extraout_XMM0_Dd_x01231;
  undefined4 extraout_XMM0_Dd_x01232;
  undefined4 extraout_XMM0_Dd_x01233;
  undefined4 extraout_XMM0_Dd_x01234;
  undefined4 extraout_XMM0_Dd_x01235;
  undefined4 extraout_XMM0_Dd_x01236;
  undefined4 extraout_XMM0_Dd_x01237;
  undefined4 extraout_XMM0_Dd_x01238;
  undefined4 extraout_XMM0_Dd_x01239;
  undefined4 extraout_XMM0_Dd_x01240;
  undefined4 extraout_XMM0_Dd_x01241;
  undefined4 extraout_XMM0_Dd_x01242;
  undefined4 extraout_XMM0_Dd_x01243;
  undefined4 extraout_XMM0_Dd_x01244;
  undefined4 extraout_XMM0_Dd_x01245;
  undefined4 extraout_XMM0_Dd_x01246;
  undefined4 extraout_XMM0_Dd_x01247;
  undefined4 extraout_XMM0_Dd_x01248;
  undefined4 extraout_XMM0_Dd_x01249;
  undefined4 extraout_XMM0_Dd_x01250;
  undefined4 extraout_XMM0_Dd_x01251;
  undefined4 extraout_XMM0_Dd_x01252;
  undefined4 extraout_XMM0_Dd_x01253;
  undefined4 extraout_XMM0_Dd_x01254;
  undefined4 extraout_XMM0_Dd_x01255;
  undefined4 extraout_XMM0_Dd_x01256;
  undefined4 extraout_XMM0_Dd_x01257;
  undefined4 extraout_XMM0_Dd_x01258;
  undefined4 extraout_XMM0_Dd_x01259;
  undefined4 extraout_XMM0_Dd_x01260;
  undefined4 extraout_XMM0_Dd_x01261;
  undefined4 extraout_XMM0_Dd_x01262;
  undefined4 extraout_XMM0_Dd_x01263;
  undefined4 extraout_XMM0_Dd_x01264;
  undefined4 extraout_XMM0_Dd_x01265;
  undefined4 extraout_XMM0_Dd_x01266;
  undefined4 extraout_XMM0_Dd_x01267;
  undefined4 extraout_XMM0_Dd_x01268;
  undefined4 extraout_XMM0_Dd_x01269;
  undefined4 extraout_XMM0_Dd_x01270;
  undefined4 extraout_XMM0_Dd_x01271;
  undefined4 extraout_XMM0_Dd_x01272;
  undefined4 extraout_XMM0_Dd_x01273;
  undefined4 extraout_XMM0_Dd_x01274;
  undefined4 extraout_XMM0_Dd_x01275;
  undefined4 extraout_XMM0_Dd_x01276;
  undefined4 extraout_XMM0_Dd_x01277;
  undefined4 extraout_XMM0_Dd_x01278;
  undefined4 extraout_XMM0_Dd_x01279;
  undefined4 extraout_XMM0_Dd_x01280;
  undefined4 extraout_XMM0_Dd_x01281;
  undefined4 extraout_XMM0_Dd_x01282;
  undefined4 extraout_XMM0_Dd_x01283;
  undefined4 extraout_XMM0_Dd_x01284;
  undefined4 extraout_XMM0_Dd_x01285;
  undefined4 extraout_XMM0_Dd_x01286;
  undefined4 extraout_XMM0_Dd_x01287;
  undefined4 extraout_XMM0_Dd_x01288;
  undefined4 extraout_XMM0_Dd_x01289;
  undefined4 extraout_XMM0_Dd_x01290;
  undefined4 extraout_XMM0_Dd_x01291;
  undefined4 extraout_XMM0_Dd_x01292;
  undefined4 extraout_XMM0_Dd_x01293;
  undefined4 extraout_XMM0_Dd_x01294;
  undefined4 extraout_XMM0_Dd_x01295;
  undefined4 extraout_XMM0_Dd_x01296;
  undefined4 extraout_XMM0_Dd_x01297;
  undefined4 extraout_XMM0_Dd_x01298;
  undefined4 extraout_XMM0_Dd_x01299;
  undefined4 extraout_XMM0_Dd_x01300;
  undefined4 extraout_XMM0_Dd_x01301;
  undefined4 extraout_XMM0_Dd_x01302;
  undefined4 extraout_XMM0_Dd_x01303;
  undefined4 extraout_XMM0_Dd_x01304;
  undefined4 extraout_XMM0_Dd_x01305;
  undefined4 extraout_XMM0_Dd_x01306;
  undefined4 extraout_XMM0_Dd_x01307;
  undefined4 extraout_XMM0_Dd_x01308;
  undefined4 extraout_XMM0_Dd_x01309;
  undefined4 extraout_XMM0_Dd_x01310;
  undefined4 extraout_XMM0_Dd_x01311;
  undefined4 extraout_XMM0_Dd_x01312;
  undefined4 extraout_XMM0_Dd_x01313;
  undefined4 extraout_XMM0_Dd_x01314;
  undefined4 extraout_XMM0_Dd_x01315;
  undefined4 extraout_XMM0_Dd_x01316;
  undefined4 extraout_XMM0_Dd_x01317;
  undefined4 extraout_XMM0_Dd_x01318;
  undefined4 extraout_XMM0_Dd_x01319;
  undefined4 extraout_XMM0_Dd_x01320;
  undefined4 extraout_XMM0_Dd_x01321;
  undefined4 extraout_XMM0_Dd_x01322;
  undefined4 extraout_XMM0_Dd_x01323;
  undefined4 extraout_XMM0_Dd_x01324;
  undefined4 extraout_XMM0_Dd_x01325;
  undefined4 extraout_XMM0_Dd_x01326;
  undefined4 extraout_XMM0_Dd_x01327;
  undefined4 extraout_XMM0_Dd_x01328;
  undefined4 extraout_XMM0_Dd_x01329;
  undefined4 extraout_XMM0_Dd_x01330;
  undefined4 extraout_XMM0_Dd_x01331;
  undefined4 extraout_XMM0_Dd_x01332;
  undefined4 extraout_XMM0_Dd_x01333;
  undefined4 extraout_XMM0_Dd_x01334;
  undefined4 extraout_XMM0_Dd_x01335;
  undefined4 extraout_XMM0_Dd_x01336;
  undefined4 extraout_XMM0_Dd_x01337;
  undefined4 extraout_XMM0_Dd_x01338;
  undefined4 extraout_XMM0_Dd_x01339;
  undefined4 extraout_XMM0_Dd_x01340;
  undefined4 extraout_XMM0_Dd_x01341;
  undefined4 extraout_XMM0_Dd_x01342;
  undefined4 extraout_XMM0_Dd_x01343;
  undefined4 extraout_XMM0_Dd_x01344;
  undefined4 extraout_XMM0_Dd_x01345;
  undefined4 extraout_XMM0_Dd_x01346;
  undefined4 extraout_XMM0_Dd_x01347;
  undefined4 extraout_XMM0_Dd_x01348;
  undefined4 extraout_XMM0_Dd_x01349;
  undefined4 extraout_XMM0_Dd_x01350;
  undefined4 extraout_XMM0_Dd_x01351;
  undefined4 extraout_XMM0_Dd_x01352;
  undefined4 extraout_XMM0_Dd_x01353;
  undefined4 extraout_XMM0_Dd_x01354;
  undefined4 extraout_XMM0_Dd_x01355;
  undefined4 extraout_XMM0_Dd_x01356;
  undefined4 extraout_XMM0_Dd_x01357;
  undefined4 extraout_XMM0_Dd_x01358;
  undefined4 extraout_XMM0_Dd_x01359;
  undefined4 extraout_XMM0_Dd_x01360;
  undefined4 extraout_XMM0_Dd_x01361;
  undefined4 extraout_XMM0_Dd_x01362;
  undefined4 extraout_XMM0_Dd_x01363;
  undefined4 extraout_XMM0_Dd_x01364;
  undefined4 extraout_XMM0_Dd_x01365;
  undefined4 extraout_XMM0_Dd_x01366;
  undefined4 extraout_XMM0_Dd_x01367;
  undefined4 extraout_XMM0_Dd_x01368;
  undefined4 extraout_XMM0_Dd_x01369;
  undefined4 extraout_XMM0_Dd_x01370;
  undefined4 extraout_XMM0_Dd_x01371;
  undefined4 extraout_XMM0_Dd_x01372;
  undefined4 extraout_XMM0_Dd_x01373;
  undefined4 extraout_XMM0_Dd_x01374;
  undefined4 extraout_XMM0_Dd_x01375;
  undefined4 extraout_XMM0_Dd_x01376;
  undefined4 extraout_XMM0_Dd_x01377;
  undefined4 extraout_XMM0_Dd_x01378;
  undefined4 extraout_XMM0_Dd_x01379;
  undefined4 extraout_XMM0_Dd_x01380;
  undefined4 extraout_XMM0_Dd_x01381;
  undefined4 extraout_XMM0_Dd_x01382;
  undefined4 extraout_XMM0_Dd_x01383;
  undefined4 extraout_XMM0_Dd_x01384;
  undefined4 extraout_XMM0_Dd_x01385;
  undefined4 extraout_XMM0_Dd_x01386;
  undefined4 extraout_XMM0_Dd_x01387;
  undefined4 extraout_XMM0_Dd_x01388;
  undefined4 extraout_XMM0_Dd_x01389;
  undefined4 extraout_XMM0_Dd_x01390;
  undefined4 extraout_XMM0_Dd_x01391;
  undefined4 extraout_XMM0_Dd_x01392;
  undefined4 extraout_XMM0_Dd_x01393;
  undefined4 extraout_XMM0_Dd_x01394;
  undefined4 extraout_XMM0_Dd_x01395;
  undefined4 extraout_XMM0_Dd_x01396;
  undefined4 extraout_XMM0_Dd_x01397;
  undefined4 extraout_XMM0_Dd_x01398;
  undefined4 extraout_XMM0_Dd_x01399;
  undefined4 extraout_XMM0_Dd_x01400;
  undefined4 extraout_XMM0_Dd_x01401;
  undefined4 extraout_XMM0_Dd_x01402;
  undefined4 extraout_XMM0_Dd_x01403;
  undefined4 extraout_XMM0_Dd_x01404;
  undefined4 extraout_XMM0_Dd_x01405;
  undefined4 extraout_XMM0_Dd_x01406;
  undefined4 extraout_XMM0_Dd_x01407;
  undefined4 extraout_XMM0_Dd_x01408;
  undefined4 extraout_XMM0_Dd_x01409;
  undefined4 extraout_XMM0_Dd_x01410;
  undefined4 extraout_XMM0_Dd_x01411;
  undefined4 extraout_XMM0_Dd_x01412;
  undefined4 extraout_XMM0_Dd_x01413;
  undefined4 extraout_XMM0_Dd_x01414;
  undefined4 extraout_XMM0_Dd_x01415;
  undefined4 extraout_XMM0_Dd_x01416;
  undefined4 extraout_XMM0_Dd_x01417;
  undefined4 extraout_XMM0_Dd_x01418;
  undefined4 extraout_XMM0_Dd_x01419;
  undefined4 extraout_XMM0_Dd_x01420;
  undefined4 extraout_XMM0_Dd_x01421;
  undefined4 extraout_XMM0_Dd_x01422;
  undefined4 extraout_XMM0_Dd_x01423;
  undefined4 extraout_XMM0_Dd_x01424;
  undefined4 extraout_XMM0_Dd_x01425;
  undefined4 extraout_XMM0_Dd_x01426;
  undefined4 extraout_XMM0_Dd_x01427;
  undefined4 extraout_XMM0_Dd_x01428;
  undefined4 extraout_XMM0_Dd_x01429;
  undefined4 extraout_XMM0_Dd_x01430;
  undefined4 extraout_XMM0_Dd_x01431;
  undefined4 extraout_XMM0_Dd_x01432;
  undefined4 extraout_XMM0_Dd_x01433;
  undefined4 extraout_XMM0_Dd_x01434;
  undefined4 extraout_XMM0_Dd_x01435;
  undefined4 extraout_XMM0_Dd_x01436;
  undefined4 extraout_XMM0_Dd_x01437;
  undefined4 extraout_XMM0_Dd_x01438;
  undefined4 extraout_XMM0_Dd_x01439;
  undefined4 extraout_XMM0_Dd_x01440;
  undefined4 extraout_XMM0_Dd_x01441;
  undefined4 extraout_XMM0_Dd_x01442;
  undefined4 extraout_XMM0_Dd_x01443;
  undefined4 extraout_XMM0_Dd_x01444;
  undefined4 extraout_XMM0_Dd_x01445;
  undefined4 extraout_XMM0_Dd_x01446;
  undefined4 extraout_XMM0_Dd_x01447;
  undefined4 extraout_XMM0_Dd_x01448;
  undefined4 extraout_XMM0_Dd_x01449;
  undefined4 extraout_XMM0_Dd_x01450;
  undefined4 extraout_XMM0_Dd_x01451;
  undefined4 extraout_XMM0_Dd_x01452;
  undefined4 extraout_XMM0_Dd_x01453;
  undefined4 extraout_XMM0_Dd_x01454;
  undefined4 extraout_XMM0_Dd_x01455;
  undefined4 extraout_XMM0_Dd_x01456;
  undefined4 extraout_XMM0_Dd_x01457;
  undefined4 extraout_XMM0_Dd_x01458;
  undefined4 extraout_XMM0_Dd_x01459;
  undefined4 extraout_XMM0_Dd_x01460;
  undefined4 extraout_XMM0_Dd_x01461;
  undefined4 extraout_XMM0_Dd_x01462;
  undefined4 extraout_XMM0_Dd_x01463;
  undefined4 extraout_XMM0_Dd_x01464;
  undefined4 extraout_XMM0_Dd_x01465;
  undefined4 extraout_XMM0_Dd_x01466;
  undefined4 extraout_XMM0_Dd_x01467;
  undefined4 extraout_XMM0_Dd_x01468;
  undefined4 extraout_XMM0_Dd_x01469;
  undefined4 extraout_XMM0_Dd_x01470;
  undefined4 extraout_XMM0_Dd_x01471;
  undefined4 extraout_XMM0_Dd_x01472;
  undefined4 extraout_XMM0_Dd_x01473;
  undefined4 extraout_XMM0_Dd_x01474;
  undefined4 extraout_XMM0_Dd_x01475;
  undefined4 extraout_XMM0_Dd_x01476;
  undefined4 extraout_XMM0_Dd_x01477;
  undefined4 extraout_XMM0_Dd_x01478;
  undefined4 extraout_XMM0_Dd_x01479;
  undefined4 extraout_XMM0_Dd_x01480;
  undefined4 extraout_XMM0_Dd_x01481;
  undefined4 extraout_XMM0_Dd_x01482;
  undefined4 extraout_XMM0_Dd_x01483;
  undefined4 extraout_XMM0_Dd_x01484;
  undefined4 extraout_XMM0_Dd_x01485;
  undefined4 extraout_XMM0_Dd_x01486;
  undefined4 extraout_XMM0_Dd_x01487;
  undefined4 extraout_XMM0_Dd_x01488;
  undefined4 extraout_XMM0_Dd_x01489;
  undefined4 extraout_XMM0_Dd_x01490;
  undefined4 extraout_XMM0_Dd_x01491;
  undefined4 extraout_XMM0_Dd_x01492;
  undefined4 extraout_XMM0_Dd_x01493;
  undefined4 extraout_XMM0_Dd_x01494;
  undefined4 extraout_XMM0_Dd_x01495;
  undefined4 extraout_XMM0_Dd_x01496;
  undefined4 extraout_XMM0_Dd_x01497;
  undefined4 extraout_XMM0_Dd_x01498;
  undefined4 extraout_XMM0_Dd_x01499;
  undefined4 extraout_XMM0_Dd_x01500;
  undefined4 extraout_XMM0_Dd_x01501;
  undefined4 extraout_XMM0_Dd_x01502;
  undefined4 extraout_XMM0_Dd_x01503;
  undefined4 extraout_XMM0_Dd_x01504;
  undefined4 extraout_XMM0_Dd_x01505;
  undefined4 extraout_XMM0_Dd_x01506;
  undefined4 extraout_XMM0_Dd_x01507;
  undefined4 extraout_XMM0_Dd_x01508;
  undefined4 extraout_XMM0_Dd_x01509;
  undefined4 extraout_XMM0_Dd_x01510;
  undefined4 extraout_XMM0_Dd_x01511;
  undefined4 extraout_XMM0_Dd_x01512;
  undefined4 extraout_XMM0_Dd_x01513;
  undefined4 extraout_XMM0_Dd_x01514;
  undefined4 extraout_XMM0_Dd_x01515;
  undefined4 extraout_XMM0_Dd_x01516;
  undefined4 extraout_XMM0_Dd_x01517;
  undefined4 extraout_XMM0_Dd_x01518;
  undefined4 extraout_XMM0_Dd_x01519;
  undefined4 extraout_XMM0_Dd_x01520;
  undefined4 extraout_XMM0_Dd_x01521;
  undefined4 extraout_XMM0_Dd_x01522;
  undefined4 extraout_XMM0_Dd_x01523;
  undefined4 extraout_XMM0_Dd_x01524;
  undefined4 extraout_XMM0_Dd_x01525;
  undefined4 extraout_XMM0_Dd_x01526;
  undefined4 extraout_XMM0_Dd_x01527;
  undefined4 extraout_XMM0_Dd_x01528;
  undefined4 extraout_XMM0_Dd_x01529;
  undefined4 extraout_XMM0_Dd_x01530;
  undefined4 extraout_XMM0_Dd_x01531;
  undefined4 extraout_XMM0_Dd_x01532;
  undefined4 extraout_XMM0_Dd_x01533;
  undefined4 extraout_XMM0_Dd_x01534;
  undefined4 extraout_XMM0_Dd_x01535;
  undefined4 extraout_XMM0_Dd_x01536;
  undefined4 extraout_XMM0_Dd_x01537;
  undefined4 extraout_XMM0_Dd_x01538;
  undefined4 extraout_XMM0_Dd_x01539;
  undefined4 extraout_XMM0_Dd_x01540;
  undefined4 extraout_XMM0_Dd_x01541;
  undefined4 extraout_XMM0_Dd_x01542;
  undefined4 extraout_XMM0_Dd_x01543;
  undefined4 extraout_XMM0_Dd_x01544;
  undefined4 extraout_XMM0_Dd_x01545;
  undefined4 extraout_XMM0_Dd_x01546;
  undefined4 extraout_XMM0_Dd_x01547;
  undefined4 extraout_XMM0_Dd_x01548;
  undefined4 extraout_XMM0_Dd_x01549;
  undefined4 extraout_XMM0_Dd_x01550;
  undefined4 extraout_XMM0_Dd_x01551;
  undefined4 extraout_XMM0_Dd_x01552;
  undefined4 extraout_XMM0_Dd_x01553;
  undefined4 extraout_XMM0_Dd_x01554;
  undefined4 extraout_XMM0_Dd_x01555;
  undefined4 extraout_XMM0_Dd_x01556;
  undefined4 extraout_XMM0_Dd_x01557;
  undefined4 extraout_XMM0_Dd_x01558;
  undefined4 extraout_XMM0_Dd_x01559;
  undefined4 extraout_XMM0_Dd_x01560;
  undefined4 extraout_XMM0_Dd_x01561;
  undefined4 extraout_XMM0_Dd_x01562;
  undefined4 extraout_XMM0_Dd_x01563;
  undefined4 extraout_XMM0_Dd_x01564;
  undefined4 extraout_XMM0_Dd_x01565;
  undefined4 extraout_XMM0_Dd_x01566;
  undefined4 extraout_XMM0_Dd_x01567;
  undefined4 extraout_XMM0_Dd_x01568;
  undefined4 extraout_XMM0_Dd_x01569;
  undefined4 extraout_XMM0_Dd_x01570;
  undefined4 extraout_XMM0_Dd_x01571;
  undefined4 extraout_XMM0_Dd_x01572;
  undefined4 extraout_XMM0_Dd_x01573;
  undefined4 extraout_XMM0_Dd_x01574;
  undefined4 extraout_XMM0_Dd_x01575;
  undefined4 extraout_XMM0_Dd_x01576;
  undefined4 extraout_XMM0_Dd_x01577;
  undefined4 extraout_XMM0_Dd_x01578;
  undefined4 extraout_XMM0_Dd_x01579;
  undefined4 extraout_XMM0_Dd_x01580;
  undefined4 extraout_XMM0_Dd_x01581;
  undefined4 extraout_XMM0_Dd_x01582;
  undefined4 extraout_XMM0_Dd_x01583;
  undefined4 extraout_XMM0_Dd_x01584;
  undefined4 extraout_XMM0_Dd_x01585;
  undefined4 extraout_XMM0_Dd_x01586;
  undefined4 extraout_XMM0_Dd_x01587;
  undefined4 extraout_XMM0_Dd_x01588;
  undefined4 extraout_XMM0_Dd_x01589;
  undefined4 extraout_XMM0_Dd_x01590;
  undefined4 extraout_XMM0_Dd_x01591;
  undefined4 extraout_XMM0_Dd_x01592;
  undefined4 extraout_XMM0_Dd_x01593;
  undefined4 extraout_XMM0_Dd_x01594;
  undefined4 extraout_XMM0_Dd_x01595;
  undefined4 extraout_XMM0_Dd_x01596;
  undefined4 extraout_XMM0_Dd_x01597;
  undefined4 extraout_XMM0_Dd_x01598;
  undefined4 extraout_XMM0_Dd_x01599;
  undefined4 extraout_XMM0_Dd_x01600;
  undefined4 extraout_XMM0_Dd_x01601;
  undefined4 extraout_XMM0_Dd_x01602;
  undefined1 auStack_10000 [31208];
  __m128i t7;
  __m128i t6;
  __m128i t5;
  __m128i t4;
  __m128i t3;
  __m128i t2;
  __m128i t1;
  __m128i t0;
  uchar *in_local;
  uchar *out_local;
  __m128i t2_192;
  __m128i t1_192;
  __m128i t2_191;
  __m128i t1_191;
  __m128i t2_190;
  __m128i t1_190;
  __m128i t2_189;
  __m128i t1_189;
  __m128i t2_188;
  __m128i t1_188;
  __m128i t2_187;
  __m128i t1_187;
  __m128i t2_186;
  __m128i t1_186;
  __m128i t2_185;
  __m128i t1_185;
  __m128i t2_184;
  __m128i t1_184;
  __m128i t2_183;
  __m128i t1_183;
  __m128i t2_182;
  __m128i t1_182;
  __m128i t2_181;
  __m128i t1_181;
  __m128i t2_180;
  __m128i t1_180;
  __m128i t2_179;
  __m128i t1_179;
  __m128i t2_178;
  __m128i t1_178;
  __m128i t2_177;
  __m128i t1_177;
  __m128i t2_176;
  __m128i t1_176;
  __m128i t2_175;
  __m128i t1_175;
  __m128i t2_174;
  __m128i t1_174;
  __m128i t2_173;
  __m128i t1_173;
  __m128i t2_172;
  __m128i t1_172;
  __m128i t2_171;
  __m128i t1_171;
  __m128i t2_170;
  __m128i t1_170;
  __m128i t2_169;
  __m128i t1_169;
  __m128i t2_168;
  __m128i t1_168;
  __m128i t2_167;
  __m128i t1_167;
  __m128i t2_166;
  __m128i t1_166;
  __m128i t2_165;
  __m128i t1_165;
  __m128i t2_164;
  __m128i t1_164;
  __m128i t2_163;
  __m128i t1_163;
  __m128i t2_162;
  __m128i t1_162;
  __m128i t2_161;
  __m128i t1_161;
  __m128i t2_160;
  __m128i t1_160;
  __m128i t2_159;
  __m128i t1_159;
  __m128i t2_158;
  __m128i t1_158;
  __m128i t2_157;
  __m128i t1_157;
  __m128i t2_156;
  __m128i t1_156;
  __m128i t2_155;
  __m128i t1_155;
  __m128i t2_154;
  __m128i t1_154;
  __m128i t2_153;
  __m128i t1_153;
  __m128i t2_152;
  __m128i t1_152;
  __m128i t2_151;
  __m128i t1_151;
  __m128i t2_150;
  __m128i t1_150;
  __m128i t2_149;
  __m128i t1_149;
  __m128i t2_148;
  __m128i t1_148;
  __m128i t2_147;
  __m128i t1_147;
  __m128i t2_146;
  __m128i t1_146;
  __m128i t2_145;
  __m128i t1_145;
  __m128i t2_144;
  __m128i t1_144;
  __m128i t2_143;
  __m128i t1_143;
  __m128i t2_142;
  __m128i t1_142;
  __m128i t2_141;
  __m128i t1_141;
  __m128i t2_140;
  __m128i t1_140;
  __m128i t2_139;
  __m128i t1_139;
  __m128i t2_138;
  __m128i t1_138;
  __m128i t2_137;
  __m128i t1_137;
  __m128i t2_136;
  __m128i t1_136;
  __m128i t2_135;
  __m128i t1_135;
  __m128i t2_134;
  __m128i t1_134;
  __m128i t2_133;
  __m128i t1_133;
  __m128i t2_132;
  __m128i t1_132;
  __m128i t2_131;
  __m128i t1_131;
  __m128i t2_130;
  __m128i t1_130;
  __m128i t2_129;
  __m128i t1_129;
  __m128i t2_128;
  __m128i t1_128;
  __m128i t2_127;
  __m128i t1_127;
  __m128i t2_126;
  __m128i t1_126;
  __m128i t2_125;
  __m128i t1_125;
  __m128i t2_124;
  __m128i t1_124;
  __m128i t2_123;
  __m128i t1_123;
  __m128i t2_122;
  __m128i t1_122;
  __m128i t2_121;
  __m128i t1_121;
  __m128i t2_120;
  __m128i t1_120;
  __m128i t2_119;
  __m128i t1_119;
  __m128i t2_118;
  __m128i t1_118;
  __m128i t2_117;
  __m128i t1_117;
  __m128i t2_116;
  __m128i t1_116;
  __m128i t2_115;
  __m128i t1_115;
  __m128i t2_114;
  __m128i t1_114;
  __m128i t2_113;
  __m128i t1_113;
  __m128i t2_112;
  __m128i t1_112;
  __m128i t2_111;
  __m128i t1_111;
  __m128i t2_110;
  __m128i t1_110;
  __m128i t2_109;
  __m128i t1_109;
  __m128i t2_108;
  __m128i t1_108;
  __m128i t2_107;
  __m128i t1_107;
  __m128i t2_106;
  __m128i t1_106;
  __m128i t2_105;
  __m128i t1_105;
  __m128i t2_104;
  __m128i t1_104;
  __m128i t2_103;
  __m128i t1_103;
  __m128i t2_102;
  __m128i t1_102;
  __m128i t2_101;
  __m128i t1_101;
  __m128i t2_100;
  __m128i t1_100;
  __m128i t2_99;
  __m128i t1_99;
  __m128i t2_98;
  __m128i t1_98;
  __m128i t2_97;
  __m128i t1_97;
  __m128i t2_96;
  __m128i t1_96;
  __m128i t2_95;
  __m128i t1_95;
  __m128i t2_94;
  __m128i t1_94;
  __m128i t2_93;
  __m128i t1_93;
  __m128i t2_92;
  __m128i t1_92;
  __m128i t2_91;
  __m128i t1_91;
  __m128i t2_90;
  __m128i t1_90;
  __m128i t2_89;
  __m128i t1_89;
  __m128i t2_88;
  __m128i t1_88;
  __m128i t2_87;
  __m128i t1_87;
  __m128i t2_86;
  __m128i t1_86;
  __m128i t2_85;
  __m128i t1_85;
  __m128i t2_84;
  __m128i t1_84;
  __m128i t2_83;
  __m128i t1_83;
  __m128i t2_82;
  __m128i t1_82;
  __m128i t2_81;
  __m128i t1_81;
  __m128i t2_80;
  __m128i t1_80;
  __m128i t2_79;
  __m128i t1_79;
  __m128i t2_78;
  __m128i t1_78;
  __m128i t2_77;
  __m128i t1_77;
  __m128i t2_76;
  __m128i t1_76;
  __m128i t2_75;
  __m128i t1_75;
  __m128i t2_74;
  __m128i t1_74;
  __m128i t2_73;
  __m128i t1_73;
  __m128i t2_72;
  __m128i t1_72;
  __m128i t2_71;
  __m128i t1_71;
  __m128i t2_70;
  __m128i t1_70;
  __m128i t2_69;
  __m128i t1_69;
  __m128i t2_68;
  __m128i t1_68;
  __m128i t2_67;
  __m128i t1_67;
  __m128i t2_66;
  __m128i t1_66;
  __m128i t2_65;
  __m128i t1_65;
  __m128i t2_64;
  __m128i t1_64;
  __m128i t2_63;
  __m128i t1_63;
  __m128i t2_62;
  __m128i t1_62;
  __m128i t2_61;
  __m128i t1_61;
  __m128i t2_60;
  __m128i t1_60;
  __m128i t2_59;
  __m128i t1_59;
  __m128i t2_58;
  __m128i t1_58;
  __m128i t2_57;
  __m128i t1_57;
  __m128i t2_56;
  __m128i t1_56;
  __m128i t2_55;
  __m128i t1_55;
  __m128i t2_54;
  __m128i t1_54;
  __m128i t2_53;
  __m128i t1_53;
  __m128i t2_52;
  __m128i t1_52;
  __m128i t2_51;
  __m128i t1_51;
  __m128i t2_50;
  __m128i t1_50;
  __m128i t2_49;
  __m128i t1_49;
  __m128i t2_48;
  __m128i t1_48;
  __m128i t2_47;
  __m128i t1_47;
  __m128i t2_46;
  __m128i t1_46;
  __m128i t2_45;
  __m128i t1_45;
  __m128i t2_44;
  __m128i t1_44;
  __m128i t2_43;
  __m128i t1_43;
  __m128i t2_42;
  __m128i t1_42;
  __m128i t2_41;
  __m128i t1_41;
  __m128i t2_40;
  __m128i t1_40;
  __m128i t2_39;
  __m128i t1_39;
  __m128i t2_38;
  __m128i t1_38;
  __m128i t2_37;
  __m128i t1_37;
  __m128i t2_36;
  __m128i t1_36;
  __m128i t2_35;
  __m128i t1_35;
  __m128i t2_34;
  __m128i t1_34;
  __m128i t2_33;
  __m128i t1_33;
  __m128i t2_32;
  __m128i t1_32;
  __m128i t2_31;
  __m128i t1_31;
  __m128i t2_30;
  __m128i t1_30;
  __m128i t2_29;
  __m128i t1_29;
  __m128i t2_28;
  __m128i t1_28;
  __m128i t2_27;
  __m128i t1_27;
  __m128i t2_26;
  __m128i t1_26;
  __m128i t2_25;
  __m128i t1_25;
  __m128i t2_24;
  __m128i t1_24;
  __m128i t2_23;
  __m128i t1_23;
  __m128i t2_22;
  __m128i t1_22;
  __m128i t2_21;
  __m128i t1_21;
  __m128i t2_20;
  __m128i t1_20;
  __m128i t2_19;
  __m128i t1_19;
  __m128i t2_18;
  __m128i t1_18;
  __m128i t2_17;
  __m128i t1_17;
  __m128i t2_16;
  __m128i t1_16;
  __m128i t2_15;
  __m128i t1_15;
  __m128i t2_14;
  __m128i t1_14;
  __m128i t2_13;
  __m128i t1_13;
  __m128i t2_12;
  __m128i t1_12;
  __m128i t2_11;
  __m128i t1_11;
  __m128i t2_10;
  __m128i t1_10;
  __m128i t2_9;
  __m128i t1_9;
  __m128i t2_8;
  __m128i t1_8;
  __m128i t2_7;
  __m128i t1_7;
  __m128i t2_6;
  __m128i t1_6;
  __m128i t2_5;
  __m128i t1_5;
  __m128i t2_4;
  __m128i t1_4;
  __m128i t2_3;
  __m128i t1_3;
  __m128i t2_2;
  __m128i t1_2;
  __m128i t2_1;
  __m128i t1_1;
  __m128i w15;
  __m128i w14;
  __m128i w13;
  __m128i w12;
  __m128i w11;
  __m128i w10;
  __m128i w9;
  __m128i w8;
  __m128i w7;
  __m128i w6;
  __m128i w5;
  __m128i w4;
  __m128i w3;
  __m128i w2;
  __m128i w1;
  __m128i w0;
  __m128i h;
  __m128i g;
  __m128i f;
  __m128i e;
  __m128i d;
  __m128i c;
  __m128i b;
  __m128i a;
  
  puVar3 = (undefined8 *)register0x00000020;
  do {
    puVar4 = puVar3;
    puVar4[-0x200] = 0;
    puVar3 = puVar4 + -0x200;
  } while (puVar4 + -0x200 != (undefined8 *)auStack_10000);
  puVar4[0x1dff] = *(undefined8 *)(in_FS_OFFSET + 0x28);
  puVar4[0xd4e] = out;
  puVar4[0xd4d] = in;
  *(undefined4 *)((long)puVar4 + 0x68e4) = 0x6a09e667;
  puVar4[-0x346] = 0x8ef5db;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1dfd) = extraout_XMM0_Da;
  *(undefined4 *)((long)puVar4 + 0xefec) = extraout_XMM0_Db;
  *(undefined4 *)(puVar4 + 0x1dfe) = extraout_XMM0_Dc;
  *(undefined4 *)((long)puVar4 + 0xeff4) = extraout_XMM0_Dd;
  *(undefined4 *)((long)puVar4 + 0x6904) = 0xbb67ae85;
  puVar4[-0x346] = 0x8ef5f4;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1dfb) = extraout_XMM0_Da_00;
  *(undefined4 *)((long)puVar4 + 0xefdc) = extraout_XMM0_Db_00;
  *(undefined4 *)(puVar4 + 0x1dfc) = extraout_XMM0_Dc_00;
  *(undefined4 *)((long)puVar4 + 0xefe4) = extraout_XMM0_Dd_00;
  *(undefined4 *)((long)puVar4 + 0x6924) = 0x3c6ef372;
  puVar4[-0x346] = 0x8ef60d;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1df9) = extraout_XMM0_Da_01;
  *(undefined4 *)((long)puVar4 + 0xefcc) = extraout_XMM0_Db_01;
  *(undefined4 *)(puVar4 + 0x1dfa) = extraout_XMM0_Dc_01;
  *(undefined4 *)((long)puVar4 + 0xefd4) = extraout_XMM0_Dd_01;
  *(undefined4 *)((long)puVar4 + 0x6944) = 0xa54ff53a;
  puVar4[-0x346] = 0x8ef626;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1df7) = extraout_XMM0_Da_02;
  *(undefined4 *)((long)puVar4 + 0xefbc) = extraout_XMM0_Db_02;
  *(undefined4 *)(puVar4 + 0x1df8) = extraout_XMM0_Dc_02;
  *(undefined4 *)((long)puVar4 + 0xefc4) = extraout_XMM0_Dd_02;
  *(undefined4 *)((long)puVar4 + 0x6964) = 0x510e527f;
  puVar4[-0x346] = 0x8ef63f;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1df5) = extraout_XMM0_Da_03;
  *(undefined4 *)((long)puVar4 + 0xefac) = extraout_XMM0_Db_03;
  *(undefined4 *)(puVar4 + 0x1df6) = extraout_XMM0_Dc_03;
  *(undefined4 *)((long)puVar4 + 0xefb4) = extraout_XMM0_Dd_03;
  *(undefined4 *)((long)puVar4 + 0x6984) = 0x9b05688c;
  puVar4[-0x346] = 0x8ef658;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1df3) = extraout_XMM0_Da_04;
  *(undefined4 *)((long)puVar4 + 0xef9c) = extraout_XMM0_Db_04;
  *(undefined4 *)(puVar4 + 0x1df4) = extraout_XMM0_Dc_04;
  *(undefined4 *)((long)puVar4 + 0xefa4) = extraout_XMM0_Dd_04;
  *(undefined4 *)((long)puVar4 + 0x69a4) = 0x1f83d9ab;
  puVar4[-0x346] = 0x8ef671;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1df1) = extraout_XMM0_Da_05;
  *(undefined4 *)((long)puVar4 + 0xef8c) = extraout_XMM0_Db_05;
  *(undefined4 *)(puVar4 + 0x1df2) = extraout_XMM0_Dc_05;
  *(undefined4 *)((long)puVar4 + 0xef94) = extraout_XMM0_Dd_05;
  *(undefined4 *)((long)puVar4 + 0x69c4) = 0x5be0cd19;
  puVar4[-0x346] = 0x8ef68a;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1def) = extraout_XMM0_Da_06;
  *(undefined4 *)((long)puVar4 + 0xef7c) = extraout_XMM0_Db_06;
  *(undefined4 *)(puVar4 + 0x1df0) = extraout_XMM0_Dc_06;
  *(undefined4 *)((long)puVar4 + 0xef84) = extraout_XMM0_Dd_06;
  puVar4[-0x343] = puVar4[0x1dfd];
  puVar4[-0x342] = puVar4[0x1dfe];
  puVar4[-0x341] = puVar4[0x1dfb];
  puVar4[-0x340] = puVar4[0x1dfc];
  puVar4[-0x33f] = puVar4[0x1df9];
  puVar4[-0x33e] = puVar4[0x1dfa];
  puVar4[-0x33d] = puVar4[0x1df5];
  puVar4[-0x33c] = puVar4[0x1df6];
  puVar4[-0x33b] = puVar4[0x1df3];
  puVar4[-0x33a] = puVar4[0x1df4];
  puVar4[-0x339] = puVar4[0x1df1];
  puVar4[-0x338] = puVar4[0x1df2];
  *(undefined4 *)((long)puVar4 + 0x3874) = 0x428a2f98;
  puVar4[-0x346] = 0x8ef6f1;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x345) = extraout_XMM0_Da_07;
  *(undefined4 *)((long)puVar4 + -0x1a24) = extraout_XMM0_Db_07;
  *(undefined4 *)(puVar4 + -0x344) = extraout_XMM0_Dc_07;
  *(undefined4 *)((long)puVar4 + -0x1a1c) = extraout_XMM0_Dd_07;
  *(undefined4 *)(puVar4 + 0xd20) = 0;
  puVar4[-0x346] = 0x8ef70b;
  anon_unknown_0::Read4((uchar *)puVar4[-0x33f],*(int *)((long)puVar4 + -0x19fc));
  *(undefined4 *)(puVar4 + 0x1ded) = extraout_XMM0_Da_08;
  *(undefined4 *)((long)puVar4 + 0xef6c) = extraout_XMM0_Db_08;
  *(undefined4 *)(puVar4 + 0x1dee) = extraout_XMM0_Dc_08;
  *(undefined4 *)((long)puVar4 + 0xef74) = extraout_XMM0_Dd_08;
  puVar4[-0x346] = 0x8ef71f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1dcd] = puVar4[-0x343];
  puVar4[0x1dce] = puVar4[-0x342];
  puVar4[0x1dcb] = puVar4[-0x341];
  puVar4[0x1dcc] = puVar4[-0x340];
  puVar4[0x1dc9] = puVar4[-0x33f];
  puVar4[0x1dca] = puVar4[-0x33e];
  puVar4[0xcb6] = puVar4 + 0x1df7;
  puVar4[0x1dc8] = puVar4 + 0x1df7;
  puVar4[0x1dc5] = puVar4[-0x33d];
  puVar4[0x1dc6] = puVar4[-0x33c];
  puVar4[0x1dc3] = puVar4[-0x33b];
  puVar4[0x1dc4] = puVar4[-0x33a];
  puVar4[0x1dc1] = puVar4[-0x339];
  puVar4[0x1dc2] = puVar4[-0x338];
  puVar4[0xcae] = puVar4 + 0x1def;
  puVar4[0x1dc0] = puVar4 + 0x1def;
  *(undefined4 *)(puVar4 + 0x1dbd) = extraout_XMM0_Da_09;
  *(undefined4 *)((long)puVar4 + 0xedec) = extraout_XMM0_Db_09;
  *(undefined4 *)(puVar4 + 0x1dbe) = extraout_XMM0_Dc_09;
  *(undefined4 *)((long)puVar4 + 0xedf4) = extraout_XMM0_Dd_09;
  uVar2 = ((undefined8 *)puVar4[0x1dc0])[1];
  puVar4[-0x335] = *(undefined8 *)puVar4[0x1dc0];
  puVar4[-0x334] = uVar2;
  puVar4[-0x346] = 0x8ef7c5;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x337) = extraout_XMM0_Da_10;
  *(undefined4 *)((long)puVar4 + -0x19b4) = extraout_XMM0_Db_10;
  *(undefined4 *)(puVar4 + -0x336) = extraout_XMM0_Dc_10;
  *(undefined4 *)((long)puVar4 + -0x19ac) = extraout_XMM0_Dd_10;
  puVar4[-0x346] = 0x8ef7e7;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8ef804;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1dbb) = extraout_XMM0_Da_11;
  *(undefined4 *)((long)puVar4 + 0xeddc) = extraout_XMM0_Db_11;
  *(undefined4 *)(puVar4 + 0x1dbc) = extraout_XMM0_Dc_11;
  *(undefined4 *)((long)puVar4 + 0xede4) = extraout_XMM0_Dd_11;
  puVar4[-0x346] = 0x8ef819;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x333) = extraout_XMM0_Da_12;
  *(undefined4 *)((long)puVar4 + -0x1994) = extraout_XMM0_Db_12;
  *(undefined4 *)(puVar4 + -0x332) = extraout_XMM0_Dc_12;
  *(undefined4 *)((long)puVar4 + -0x198c) = extraout_XMM0_Dd_12;
  puVar4[-0x346] = 0x8ef83e;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8ef84e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1db9) = extraout_XMM0_Da_13;
  *(undefined4 *)((long)puVar4 + 0xedcc) = extraout_XMM0_Db_13;
  *(undefined4 *)(puVar4 + 0x1dba) = extraout_XMM0_Dc_13;
  *(undefined4 *)((long)puVar4 + 0xedd4) = extraout_XMM0_Dd_13;
  puVar4[-0x346] = 0x8ef86e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1dc8];
  *puVar1 = extraout_XMM0_Da_14;
  puVar1[1] = extraout_XMM0_Db_14;
  puVar1[2] = extraout_XMM0_Dc_14;
  puVar1[3] = extraout_XMM0_Dd_14;
  puVar4[-0x346] = 0x8ef88e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1dc0];
  *puVar1 = extraout_XMM0_Da_15;
  puVar1[1] = extraout_XMM0_Db_15;
  puVar1[2] = extraout_XMM0_Dc_15;
  puVar1[3] = extraout_XMM0_Dd_15;
  puVar4[-0x32f] = puVar4[0x1def];
  puVar4[-0x32e] = puVar4[0x1df0];
  puVar4[-0x32d] = puVar4[0x1dfd];
  puVar4[-0x32c] = puVar4[0x1dfe];
  puVar4[-0x32b] = puVar4[0x1dfb];
  puVar4[-0x32a] = puVar4[0x1dfc];
  puVar4[-0x329] = puVar4[0x1df7];
  puVar4[-0x328] = puVar4[0x1df8];
  puVar4[-0x327] = puVar4[0x1df5];
  puVar4[-0x326] = puVar4[0x1df6];
  puVar4[-0x325] = puVar4[0x1df3];
  puVar4[-0x324] = puVar4[0x1df4];
  *(undefined4 *)((long)puVar4 + 0x3914) = 0x71374491;
  puVar4[-0x346] = 0x8ef90a;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x331) = extraout_XMM0_Da_16;
  *(undefined4 *)((long)puVar4 + -0x1984) = extraout_XMM0_Db_16;
  *(undefined4 *)(puVar4 + -0x330) = extraout_XMM0_Dc_16;
  *(undefined4 *)((long)puVar4 + -0x197c) = extraout_XMM0_Dd_16;
  *(undefined4 *)(puVar4 + 0xd24) = 4;
  puVar4[-0x346] = 0x8ef92b;
  anon_unknown_0::Read4((uchar *)puVar4[-0x33f],*(int *)((long)puVar4 + -0x19fc));
  *(undefined4 *)(puVar4 + 0x1deb) = extraout_XMM0_Da_17;
  *(undefined4 *)((long)puVar4 + 0xef5c) = extraout_XMM0_Db_17;
  *(undefined4 *)(puVar4 + 0x1dec) = extraout_XMM0_Dc_17;
  *(undefined4 *)((long)puVar4 + 0xef64) = extraout_XMM0_Dd_17;
  puVar4[-0x346] = 0x8ef943;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1db7] = puVar4[-0x32f];
  puVar4[0x1db8] = puVar4[-0x32e];
  puVar4[0x1db5] = puVar4[-0x32d];
  puVar4[0x1db6] = puVar4[-0x32c];
  puVar4[0x1db3] = puVar4[-0x32b];
  puVar4[0x1db4] = puVar4[-0x32a];
  puVar4[0xcd4] = puVar4 + 0x1df9;
  puVar4[0x1db2] = puVar4 + 0x1df9;
  puVar4[0x1daf] = puVar4[-0x329];
  puVar4[0x1db0] = puVar4[-0x328];
  puVar4[0x1dad] = puVar4[-0x327];
  puVar4[0x1dae] = puVar4[-0x326];
  puVar4[0x1dab] = puVar4[-0x325];
  puVar4[0x1dac] = puVar4[-0x324];
  puVar4[0xccc] = puVar4 + 0x1df1;
  puVar4[0x1daa] = puVar4 + 0x1df1;
  *(undefined4 *)(puVar4 + 0x1da7) = extraout_XMM0_Da_18;
  *(undefined4 *)((long)puVar4 + 0xed3c) = extraout_XMM0_Db_18;
  *(undefined4 *)(puVar4 + 0x1da8) = extraout_XMM0_Dc_18;
  *(undefined4 *)((long)puVar4 + 0xed44) = extraout_XMM0_Dd_18;
  uVar2 = ((undefined8 *)puVar4[0x1daa])[1];
  puVar4[-0x321] = *(undefined8 *)puVar4[0x1daa];
  puVar4[-800] = uVar2;
  puVar4[-0x346] = 0x8ef9fb;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x323) = extraout_XMM0_Da_19;
  *(undefined4 *)((long)puVar4 + -0x1914) = extraout_XMM0_Db_19;
  *(undefined4 *)(puVar4 + -0x322) = extraout_XMM0_Dc_19;
  *(undefined4 *)((long)puVar4 + -0x190c) = extraout_XMM0_Dd_19;
  puVar4[-0x346] = 0x8efa20;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8efa40;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1da5) = extraout_XMM0_Da_20;
  *(undefined4 *)((long)puVar4 + 0xed2c) = extraout_XMM0_Db_20;
  *(undefined4 *)(puVar4 + 0x1da6) = extraout_XMM0_Dc_20;
  *(undefined4 *)((long)puVar4 + 0xed34) = extraout_XMM0_Dd_20;
  puVar4[-0x346] = 0x8efa55;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -799) = extraout_XMM0_Da_21;
  *(undefined4 *)((long)puVar4 + -0x18f4) = extraout_XMM0_Db_21;
  *(undefined4 *)(puVar4 + -0x31e) = extraout_XMM0_Dc_21;
  *(undefined4 *)((long)puVar4 + -0x18ec) = extraout_XMM0_Dd_21;
  puVar4[-0x346] = 0x8efa7a;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8efa8a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1da3) = extraout_XMM0_Da_22;
  *(undefined4 *)((long)puVar4 + 0xed1c) = extraout_XMM0_Db_22;
  *(undefined4 *)(puVar4 + 0x1da4) = extraout_XMM0_Dc_22;
  *(undefined4 *)((long)puVar4 + 0xed24) = extraout_XMM0_Dd_22;
  puVar4[-0x346] = 0x8efaaa;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1db2];
  *puVar1 = extraout_XMM0_Da_23;
  puVar1[1] = extraout_XMM0_Db_23;
  puVar1[2] = extraout_XMM0_Dc_23;
  puVar1[3] = extraout_XMM0_Dd_23;
  puVar4[-0x346] = 0x8efaca;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1daa];
  *puVar1 = extraout_XMM0_Da_24;
  puVar1[1] = extraout_XMM0_Db_24;
  puVar1[2] = extraout_XMM0_Dc_24;
  puVar1[3] = extraout_XMM0_Dd_24;
  puVar4[-0x31b] = puVar4[0x1df1];
  puVar4[-0x31a] = puVar4[0x1df2];
  puVar4[-0x319] = puVar4[0x1def];
  puVar4[-0x318] = puVar4[0x1df0];
  puVar4[-0x317] = puVar4[0x1dfd];
  puVar4[-0x316] = puVar4[0x1dfe];
  puVar4[-0x315] = puVar4[0x1df9];
  puVar4[-0x314] = puVar4[0x1dfa];
  puVar4[-0x313] = puVar4[0x1df7];
  puVar4[-0x312] = puVar4[0x1df8];
  puVar4[-0x311] = puVar4[0x1df5];
  puVar4[-0x310] = puVar4[0x1df6];
  *(undefined4 *)((long)puVar4 + 0x39b4) = 0xb5c0fbcf;
  puVar4[-0x346] = 0x8efb46;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x31d) = extraout_XMM0_Da_25;
  *(undefined4 *)((long)puVar4 + -0x18e4) = extraout_XMM0_Db_25;
  *(undefined4 *)(puVar4 + -0x31c) = extraout_XMM0_Dc_25;
  *(undefined4 *)((long)puVar4 + -0x18dc) = extraout_XMM0_Dd_25;
  *(undefined4 *)(puVar4 + 0xd28) = 8;
  puVar4[-0x346] = 0x8efb67;
  anon_unknown_0::Read4((uchar *)puVar4[-0x33f],*(int *)((long)puVar4 + -0x19fc));
  *(undefined4 *)(puVar4 + 0x1de9) = extraout_XMM0_Da_26;
  *(undefined4 *)((long)puVar4 + 0xef4c) = extraout_XMM0_Db_26;
  *(undefined4 *)(puVar4 + 0x1dea) = extraout_XMM0_Dc_26;
  *(undefined4 *)((long)puVar4 + 0xef54) = extraout_XMM0_Dd_26;
  puVar4[-0x346] = 0x8efb7f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1da1] = puVar4[-0x31b];
  puVar4[0x1da2] = puVar4[-0x31a];
  puVar4[0x1d9f] = puVar4[-0x319];
  puVar4[0x1da0] = puVar4[-0x318];
  puVar4[0x1d9d] = puVar4[-0x317];
  puVar4[0x1d9e] = puVar4[-0x316];
  puVar4[0xcf4] = puVar4 + 0x1dfb;
  puVar4[0x1d9c] = puVar4 + 0x1dfb;
  puVar4[0x1d99] = puVar4[-0x315];
  puVar4[0x1d9a] = puVar4[-0x314];
  puVar4[0x1d97] = puVar4[-0x313];
  puVar4[0x1d98] = puVar4[-0x312];
  puVar4[0x1d95] = puVar4[-0x311];
  puVar4[0x1d96] = puVar4[-0x310];
  puVar4[0xcec] = puVar4 + 0x1df3;
  puVar4[0x1d94] = puVar4 + 0x1df3;
  *(undefined4 *)(puVar4 + 0x1d91) = extraout_XMM0_Da_27;
  *(undefined4 *)((long)puVar4 + 0xec8c) = extraout_XMM0_Db_27;
  *(undefined4 *)(puVar4 + 0x1d92) = extraout_XMM0_Dc_27;
  *(undefined4 *)((long)puVar4 + 0xec94) = extraout_XMM0_Dd_27;
  uVar2 = ((undefined8 *)puVar4[0x1d94])[1];
  puVar4[-0x30d] = *(undefined8 *)puVar4[0x1d94];
  puVar4[-0x30c] = uVar2;
  puVar4[-0x346] = 0x8efc37;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x30f) = extraout_XMM0_Da_28;
  *(undefined4 *)((long)puVar4 + -0x1874) = extraout_XMM0_Db_28;
  *(undefined4 *)(puVar4 + -0x30e) = extraout_XMM0_Dc_28;
  *(undefined4 *)((long)puVar4 + -0x186c) = extraout_XMM0_Dd_28;
  puVar4[-0x346] = 0x8efc5c;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8efc7c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1d8f) = extraout_XMM0_Da_29;
  *(undefined4 *)((long)puVar4 + 0xec7c) = extraout_XMM0_Db_29;
  *(undefined4 *)(puVar4 + 0x1d90) = extraout_XMM0_Dc_29;
  *(undefined4 *)((long)puVar4 + 0xec84) = extraout_XMM0_Dd_29;
  puVar4[-0x346] = 0x8efc91;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x30b) = extraout_XMM0_Da_30;
  *(undefined4 *)((long)puVar4 + -0x1854) = extraout_XMM0_Db_30;
  *(undefined4 *)(puVar4 + -0x30a) = extraout_XMM0_Dc_30;
  *(undefined4 *)((long)puVar4 + -0x184c) = extraout_XMM0_Dd_30;
  puVar4[-0x346] = 0x8efcb6;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8efcc6;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1d8d) = extraout_XMM0_Da_31;
  *(undefined4 *)((long)puVar4 + 0xec6c) = extraout_XMM0_Db_31;
  *(undefined4 *)(puVar4 + 0x1d8e) = extraout_XMM0_Dc_31;
  *(undefined4 *)((long)puVar4 + 0xec74) = extraout_XMM0_Dd_31;
  puVar4[-0x346] = 0x8efce6;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1d9c];
  *puVar1 = extraout_XMM0_Da_32;
  puVar1[1] = extraout_XMM0_Db_32;
  puVar1[2] = extraout_XMM0_Dc_32;
  puVar1[3] = extraout_XMM0_Dd_32;
  puVar4[-0x346] = 0x8efd06;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1d94];
  *puVar1 = extraout_XMM0_Da_33;
  puVar1[1] = extraout_XMM0_Db_33;
  puVar1[2] = extraout_XMM0_Dc_33;
  puVar1[3] = extraout_XMM0_Dd_33;
  puVar4[-0x307] = puVar4[0x1df3];
  puVar4[-0x306] = puVar4[0x1df4];
  puVar4[-0x305] = puVar4[0x1df1];
  puVar4[-0x304] = puVar4[0x1df2];
  puVar4[-0x303] = puVar4[0x1def];
  puVar4[-0x302] = puVar4[0x1df0];
  puVar4[-0x301] = puVar4[0x1dfb];
  puVar4[-0x300] = puVar4[0x1dfc];
  puVar4[-0x2ff] = puVar4[0x1df9];
  puVar4[-0x2fe] = puVar4[0x1dfa];
  puVar4[-0x2fd] = puVar4[0x1df7];
  puVar4[-0x2fc] = puVar4[0x1df8];
  *(undefined4 *)((long)puVar4 + 0x3a54) = 0xe9b5dba5;
  puVar4[-0x346] = 0x8efd82;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x309) = extraout_XMM0_Da_34;
  *(undefined4 *)((long)puVar4 + -0x1844) = extraout_XMM0_Db_34;
  *(undefined4 *)(puVar4 + -0x308) = extraout_XMM0_Dc_34;
  *(undefined4 *)((long)puVar4 + -0x183c) = extraout_XMM0_Dd_34;
  *(undefined4 *)(puVar4 + 0xd2c) = 0xc;
  puVar4[-0x346] = 0x8efda3;
  anon_unknown_0::Read4((uchar *)puVar4[-0x33f],*(int *)((long)puVar4 + -0x19fc));
  *(undefined4 *)(puVar4 + 0x1de7) = extraout_XMM0_Da_35;
  *(undefined4 *)((long)puVar4 + 0xef3c) = extraout_XMM0_Db_35;
  *(undefined4 *)(puVar4 + 0x1de8) = extraout_XMM0_Dc_35;
  *(undefined4 *)((long)puVar4 + 0xef44) = extraout_XMM0_Dd_35;
  puVar4[-0x346] = 0x8efdbb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1d8b] = puVar4[-0x307];
  puVar4[0x1d8c] = puVar4[-0x306];
  puVar4[0x1d89] = puVar4[-0x305];
  puVar4[0x1d8a] = puVar4[-0x304];
  puVar4[0x1d87] = puVar4[-0x303];
  puVar4[0x1d88] = puVar4[-0x302];
  puVar4[0xd14] = puVar4 + 0x1dfd;
  puVar4[0x1d86] = puVar4 + 0x1dfd;
  puVar4[0x1d83] = puVar4[-0x301];
  puVar4[0x1d84] = puVar4[-0x300];
  puVar4[0x1d81] = puVar4[-0x2ff];
  puVar4[0x1d82] = puVar4[-0x2fe];
  puVar4[0x1d7f] = puVar4[-0x2fd];
  puVar4[0x1d80] = puVar4[-0x2fc];
  puVar4[0xd0c] = puVar4 + 0x1df5;
  puVar4[0x1d7e] = puVar4 + 0x1df5;
  *(undefined4 *)(puVar4 + 0x1d7b) = extraout_XMM0_Da_36;
  *(undefined4 *)((long)puVar4 + 0xebdc) = extraout_XMM0_Db_36;
  *(undefined4 *)(puVar4 + 0x1d7c) = extraout_XMM0_Dc_36;
  *(undefined4 *)((long)puVar4 + 0xebe4) = extraout_XMM0_Dd_36;
  uVar2 = ((undefined8 *)puVar4[0x1d7e])[1];
  puVar4[-0x2f9] = *(undefined8 *)puVar4[0x1d7e];
  puVar4[-0x2f8] = uVar2;
  puVar4[-0x346] = 0x8efe73;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x2fb) = extraout_XMM0_Da_37;
  *(undefined4 *)((long)puVar4 + -0x17d4) = extraout_XMM0_Db_37;
  *(undefined4 *)(puVar4 + -0x2fa) = extraout_XMM0_Dc_37;
  *(undefined4 *)((long)puVar4 + -0x17cc) = extraout_XMM0_Dd_37;
  puVar4[-0x346] = 0x8efe98;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8efeb8;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1d79) = extraout_XMM0_Da_38;
  *(undefined4 *)((long)puVar4 + 0xebcc) = extraout_XMM0_Db_38;
  *(undefined4 *)(puVar4 + 0x1d7a) = extraout_XMM0_Dc_38;
  *(undefined4 *)((long)puVar4 + 0xebd4) = extraout_XMM0_Dd_38;
  puVar4[-0x346] = 0x8efecd;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x2f7) = extraout_XMM0_Da_39;
  *(undefined4 *)((long)puVar4 + -0x17b4) = extraout_XMM0_Db_39;
  *(undefined4 *)(puVar4 + -0x2f6) = extraout_XMM0_Dc_39;
  *(undefined4 *)((long)puVar4 + -0x17ac) = extraout_XMM0_Dd_39;
  puVar4[-0x346] = 0x8efef2;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8eff02;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1d77) = extraout_XMM0_Da_40;
  *(undefined4 *)((long)puVar4 + 0xebbc) = extraout_XMM0_Db_40;
  *(undefined4 *)(puVar4 + 0x1d78) = extraout_XMM0_Dc_40;
  *(undefined4 *)((long)puVar4 + 0xebc4) = extraout_XMM0_Dd_40;
  puVar4[-0x346] = 0x8eff22;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1d86];
  *puVar1 = extraout_XMM0_Da_41;
  puVar1[1] = extraout_XMM0_Db_41;
  puVar1[2] = extraout_XMM0_Dc_41;
  puVar1[3] = extraout_XMM0_Dd_41;
  puVar4[-0x346] = 0x8eff42;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1d7e];
  *puVar1 = extraout_XMM0_Da_42;
  puVar1[1] = extraout_XMM0_Db_42;
  puVar1[2] = extraout_XMM0_Dc_42;
  puVar1[3] = extraout_XMM0_Dd_42;
  puVar4[-0x2f3] = puVar4[0x1df5];
  puVar4[-0x2f2] = puVar4[0x1df6];
  puVar4[-0x2f1] = puVar4[0x1df3];
  puVar4[-0x2f0] = puVar4[0x1df4];
  puVar4[-0x2ef] = puVar4[0x1df1];
  puVar4[-0x2ee] = puVar4[0x1df2];
  puVar4[-0x2ed] = puVar4[0x1dfd];
  puVar4[-0x2ec] = puVar4[0x1dfe];
  puVar4[-0x2eb] = puVar4[0x1dfb];
  puVar4[-0x2ea] = puVar4[0x1dfc];
  puVar4[-0x2e9] = puVar4[0x1df9];
  puVar4[-0x2e8] = puVar4[0x1dfa];
  *(undefined4 *)((long)puVar4 + 0x3af4) = 0x3956c25b;
  puVar4[-0x346] = 0x8effbe;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x2f5) = extraout_XMM0_Da_43;
  *(undefined4 *)((long)puVar4 + -0x17a4) = extraout_XMM0_Db_43;
  *(undefined4 *)(puVar4 + -0x2f4) = extraout_XMM0_Dc_43;
  *(undefined4 *)((long)puVar4 + -0x179c) = extraout_XMM0_Dd_43;
  *(undefined4 *)(puVar4 + 0xd30) = 0x10;
  puVar4[-0x346] = 0x8effdf;
  anon_unknown_0::Read4((uchar *)puVar4[-0x33f],*(int *)((long)puVar4 + -0x19fc));
  *(undefined4 *)(puVar4 + 0x1de5) = extraout_XMM0_Da_44;
  *(undefined4 *)((long)puVar4 + 0xef2c) = extraout_XMM0_Db_44;
  *(undefined4 *)(puVar4 + 0x1de6) = extraout_XMM0_Dc_44;
  *(undefined4 *)((long)puVar4 + 0xef34) = extraout_XMM0_Dd_44;
  puVar4[-0x346] = 0x8efff7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1d75] = puVar4[-0x2f3];
  puVar4[0x1d76] = puVar4[-0x2f2];
  puVar4[0x1d73] = puVar4[-0x2f1];
  puVar4[0x1d74] = puVar4[-0x2f0];
  puVar4[0x1d71] = puVar4[-0x2ef];
  puVar4[0x1d72] = puVar4[-0x2ee];
  puVar4[0x1d70] = puVar4[0xcae];
  puVar4[0x1d6d] = puVar4[-0x2ed];
  puVar4[0x1d6e] = puVar4[-0x2ec];
  puVar4[0x1d6b] = puVar4[-0x2eb];
  puVar4[0x1d6c] = puVar4[-0x2ea];
  puVar4[0x1d69] = puVar4[-0x2e9];
  puVar4[0x1d6a] = puVar4[-0x2e8];
  puVar4[0x1d68] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x1d65) = extraout_XMM0_Da_45;
  *(undefined4 *)((long)puVar4 + 0xeb2c) = extraout_XMM0_Db_45;
  *(undefined4 *)(puVar4 + 0x1d66) = extraout_XMM0_Dc_45;
  *(undefined4 *)((long)puVar4 + 0xeb34) = extraout_XMM0_Dd_45;
  uVar2 = ((undefined8 *)puVar4[0x1d68])[1];
  puVar4[-0x2e5] = *(undefined8 *)puVar4[0x1d68];
  puVar4[-0x2e4] = uVar2;
  puVar4[-0x346] = 0x8f009f;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x2e7) = extraout_XMM0_Da_46;
  *(undefined4 *)((long)puVar4 + -0x1734) = extraout_XMM0_Db_46;
  *(undefined4 *)(puVar4 + -0x2e6) = extraout_XMM0_Dc_46;
  *(undefined4 *)((long)puVar4 + -0x172c) = extraout_XMM0_Dd_46;
  puVar4[-0x346] = 0x8f00c4;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f00e4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1d63) = extraout_XMM0_Da_47;
  *(undefined4 *)((long)puVar4 + 0xeb1c) = extraout_XMM0_Db_47;
  *(undefined4 *)(puVar4 + 0x1d64) = extraout_XMM0_Dc_47;
  *(undefined4 *)((long)puVar4 + 0xeb24) = extraout_XMM0_Dd_47;
  puVar4[-0x346] = 0x8f00f9;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x2e3) = extraout_XMM0_Da_48;
  *(undefined4 *)((long)puVar4 + -0x1714) = extraout_XMM0_Db_48;
  *(undefined4 *)(puVar4 + -0x2e2) = extraout_XMM0_Dc_48;
  *(undefined4 *)((long)puVar4 + -0x170c) = extraout_XMM0_Dd_48;
  puVar4[-0x346] = 0x8f011e;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f012e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1d61) = extraout_XMM0_Da_49;
  *(undefined4 *)((long)puVar4 + 0xeb0c) = extraout_XMM0_Db_49;
  *(undefined4 *)(puVar4 + 0x1d62) = extraout_XMM0_Dc_49;
  *(undefined4 *)((long)puVar4 + 0xeb14) = extraout_XMM0_Dd_49;
  puVar4[-0x346] = 0x8f014e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1d70];
  *puVar1 = extraout_XMM0_Da_50;
  puVar1[1] = extraout_XMM0_Db_50;
  puVar1[2] = extraout_XMM0_Dc_50;
  puVar1[3] = extraout_XMM0_Dd_50;
  puVar4[-0x346] = 0x8f016e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1d68];
  *puVar1 = extraout_XMM0_Da_51;
  puVar1[1] = extraout_XMM0_Db_51;
  puVar1[2] = extraout_XMM0_Dc_51;
  puVar1[3] = extraout_XMM0_Dd_51;
  puVar4[-0x2df] = puVar4[0x1df7];
  puVar4[-0x2de] = puVar4[0x1df8];
  puVar4[-0x2dd] = puVar4[0x1df5];
  puVar4[-0x2dc] = puVar4[0x1df6];
  puVar4[-0x2db] = puVar4[0x1df3];
  puVar4[-0x2da] = puVar4[0x1df4];
  puVar4[-0x2d9] = puVar4[0x1def];
  puVar4[-0x2d8] = puVar4[0x1df0];
  puVar4[-0x2d7] = puVar4[0x1dfd];
  puVar4[-0x2d6] = puVar4[0x1dfe];
  puVar4[-0x2d5] = puVar4[0x1dfb];
  puVar4[-0x2d4] = puVar4[0x1dfc];
  *(undefined4 *)((long)puVar4 + 0x3b94) = 0x59f111f1;
  puVar4[-0x346] = 0x8f01ea;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x2e1) = extraout_XMM0_Da_52;
  *(undefined4 *)((long)puVar4 + -0x1704) = extraout_XMM0_Db_52;
  *(undefined4 *)(puVar4 + -0x2e0) = extraout_XMM0_Dc_52;
  *(undefined4 *)((long)puVar4 + -0x16fc) = extraout_XMM0_Dd_52;
  *(undefined4 *)(puVar4 + 0xd34) = 0x14;
  puVar4[-0x346] = 0x8f020b;
  anon_unknown_0::Read4((uchar *)puVar4[-0x33f],*(int *)((long)puVar4 + -0x19fc));
  *(undefined4 *)(puVar4 + 0x1de3) = extraout_XMM0_Da_53;
  *(undefined4 *)((long)puVar4 + 0xef1c) = extraout_XMM0_Db_53;
  *(undefined4 *)(puVar4 + 0x1de4) = extraout_XMM0_Dc_53;
  *(undefined4 *)((long)puVar4 + 0xef24) = extraout_XMM0_Dd_53;
  puVar4[-0x346] = 0x8f0223;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1d5f] = puVar4[-0x2df];
  puVar4[0x1d60] = puVar4[-0x2de];
  puVar4[0x1d5d] = puVar4[-0x2dd];
  puVar4[0x1d5e] = puVar4[-0x2dc];
  puVar4[0x1d5b] = puVar4[-0x2db];
  puVar4[0x1d5c] = puVar4[-0x2da];
  puVar4[0x1d5a] = puVar4[0xccc];
  puVar4[0x1d57] = puVar4[-0x2d9];
  puVar4[0x1d58] = puVar4[-0x2d8];
  puVar4[0x1d55] = puVar4[-0x2d7];
  puVar4[0x1d56] = puVar4[-0x2d6];
  puVar4[0x1d53] = puVar4[-0x2d5];
  puVar4[0x1d54] = puVar4[-0x2d4];
  puVar4[0x1d52] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x1d4f) = extraout_XMM0_Da_54;
  *(undefined4 *)((long)puVar4 + 0xea7c) = extraout_XMM0_Db_54;
  *(undefined4 *)(puVar4 + 0x1d50) = extraout_XMM0_Dc_54;
  *(undefined4 *)((long)puVar4 + 0xea84) = extraout_XMM0_Dd_54;
  uVar2 = ((undefined8 *)puVar4[0x1d52])[1];
  puVar4[-0x2d1] = *(undefined8 *)puVar4[0x1d52];
  puVar4[-0x2d0] = uVar2;
  puVar4[-0x346] = 0x8f02cb;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x2d3) = extraout_XMM0_Da_55;
  *(undefined4 *)((long)puVar4 + -0x1694) = extraout_XMM0_Db_55;
  *(undefined4 *)(puVar4 + -0x2d2) = extraout_XMM0_Dc_55;
  *(undefined4 *)((long)puVar4 + -0x168c) = extraout_XMM0_Dd_55;
  puVar4[-0x346] = 0x8f02f0;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f0310;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1d4d) = extraout_XMM0_Da_56;
  *(undefined4 *)((long)puVar4 + 0xea6c) = extraout_XMM0_Db_56;
  *(undefined4 *)(puVar4 + 0x1d4e) = extraout_XMM0_Dc_56;
  *(undefined4 *)((long)puVar4 + 0xea74) = extraout_XMM0_Dd_56;
  puVar4[-0x346] = 0x8f0325;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x2cf) = extraout_XMM0_Da_57;
  *(undefined4 *)((long)puVar4 + -0x1674) = extraout_XMM0_Db_57;
  *(undefined4 *)(puVar4 + -0x2ce) = extraout_XMM0_Dc_57;
  *(undefined4 *)((long)puVar4 + -0x166c) = extraout_XMM0_Dd_57;
  puVar4[-0x346] = 0x8f034a;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f035a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1d4b) = extraout_XMM0_Da_58;
  *(undefined4 *)((long)puVar4 + 0xea5c) = extraout_XMM0_Db_58;
  *(undefined4 *)(puVar4 + 0x1d4c) = extraout_XMM0_Dc_58;
  *(undefined4 *)((long)puVar4 + 0xea64) = extraout_XMM0_Dd_58;
  puVar4[-0x346] = 0x8f037a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1d5a];
  *puVar1 = extraout_XMM0_Da_59;
  puVar1[1] = extraout_XMM0_Db_59;
  puVar1[2] = extraout_XMM0_Dc_59;
  puVar1[3] = extraout_XMM0_Dd_59;
  puVar4[-0x346] = 0x8f039a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1d52];
  *puVar1 = extraout_XMM0_Da_60;
  puVar1[1] = extraout_XMM0_Db_60;
  puVar1[2] = extraout_XMM0_Dc_60;
  puVar1[3] = extraout_XMM0_Dd_60;
  puVar4[-0x2cb] = puVar4[0x1df9];
  puVar4[-0x2ca] = puVar4[0x1dfa];
  puVar4[-0x2c9] = puVar4[0x1df7];
  puVar4[-0x2c8] = puVar4[0x1df8];
  puVar4[-0x2c7] = puVar4[0x1df5];
  puVar4[-0x2c6] = puVar4[0x1df6];
  puVar4[-0x2c5] = puVar4[0x1df1];
  puVar4[-0x2c4] = puVar4[0x1df2];
  puVar4[-0x2c3] = puVar4[0x1def];
  puVar4[-0x2c2] = puVar4[0x1df0];
  puVar4[-0x2c1] = puVar4[0x1dfd];
  puVar4[-0x2c0] = puVar4[0x1dfe];
  *(undefined4 *)((long)puVar4 + 0x3c34) = 0x923f82a4;
  puVar4[-0x346] = 0x8f0416;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x2cd) = extraout_XMM0_Da_61;
  *(undefined4 *)((long)puVar4 + -0x1664) = extraout_XMM0_Db_61;
  *(undefined4 *)(puVar4 + -0x2cc) = extraout_XMM0_Dc_61;
  *(undefined4 *)((long)puVar4 + -0x165c) = extraout_XMM0_Dd_61;
  *(undefined4 *)(puVar4 + 0xd38) = 0x18;
  puVar4[-0x346] = 0x8f0437;
  anon_unknown_0::Read4((uchar *)puVar4[-0x33f],*(int *)((long)puVar4 + -0x19fc));
  *(undefined4 *)(puVar4 + 0x1de1) = extraout_XMM0_Da_62;
  *(undefined4 *)((long)puVar4 + 0xef0c) = extraout_XMM0_Db_62;
  *(undefined4 *)(puVar4 + 0x1de2) = extraout_XMM0_Dc_62;
  *(undefined4 *)((long)puVar4 + 0xef14) = extraout_XMM0_Dd_62;
  puVar4[-0x346] = 0x8f044f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1d49] = puVar4[-0x2cb];
  puVar4[0x1d4a] = puVar4[-0x2ca];
  puVar4[0x1d47] = puVar4[-0x2c9];
  puVar4[0x1d48] = puVar4[-0x2c8];
  puVar4[0x1d45] = puVar4[-0x2c7];
  puVar4[0x1d46] = puVar4[-0x2c6];
  puVar4[0x1d44] = puVar4[0xcec];
  puVar4[0x1d41] = puVar4[-0x2c5];
  puVar4[0x1d42] = puVar4[-0x2c4];
  puVar4[0x1d3f] = puVar4[-0x2c3];
  puVar4[0x1d40] = puVar4[-0x2c2];
  puVar4[0x1d3d] = puVar4[-0x2c1];
  puVar4[0x1d3e] = puVar4[-0x2c0];
  puVar4[0x1d3c] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x1d39) = extraout_XMM0_Da_63;
  *(undefined4 *)((long)puVar4 + 0xe9cc) = extraout_XMM0_Db_63;
  *(undefined4 *)(puVar4 + 0x1d3a) = extraout_XMM0_Dc_63;
  *(undefined4 *)((long)puVar4 + 0xe9d4) = extraout_XMM0_Dd_63;
  uVar2 = ((undefined8 *)puVar4[0x1d3c])[1];
  puVar4[-0x2bd] = *(undefined8 *)puVar4[0x1d3c];
  puVar4[-700] = uVar2;
  puVar4[-0x346] = 0x8f04f7;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x2bf) = extraout_XMM0_Da_64;
  *(undefined4 *)((long)puVar4 + -0x15f4) = extraout_XMM0_Db_64;
  *(undefined4 *)(puVar4 + -0x2be) = extraout_XMM0_Dc_64;
  *(undefined4 *)((long)puVar4 + -0x15ec) = extraout_XMM0_Dd_64;
  puVar4[-0x346] = 0x8f051c;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f053c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1d37) = extraout_XMM0_Da_65;
  *(undefined4 *)((long)puVar4 + 0xe9bc) = extraout_XMM0_Db_65;
  *(undefined4 *)(puVar4 + 0x1d38) = extraout_XMM0_Dc_65;
  *(undefined4 *)((long)puVar4 + 0xe9c4) = extraout_XMM0_Dd_65;
  puVar4[-0x346] = 0x8f0551;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -699) = extraout_XMM0_Da_66;
  *(undefined4 *)((long)puVar4 + -0x15d4) = extraout_XMM0_Db_66;
  *(undefined4 *)(puVar4 + -0x2ba) = extraout_XMM0_Dc_66;
  *(undefined4 *)((long)puVar4 + -0x15cc) = extraout_XMM0_Dd_66;
  puVar4[-0x346] = 0x8f0576;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f0586;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1d35) = extraout_XMM0_Da_67;
  *(undefined4 *)((long)puVar4 + 0xe9ac) = extraout_XMM0_Db_67;
  *(undefined4 *)(puVar4 + 0x1d36) = extraout_XMM0_Dc_67;
  *(undefined4 *)((long)puVar4 + 0xe9b4) = extraout_XMM0_Dd_67;
  puVar4[-0x346] = 0x8f05a6;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1d44];
  *puVar1 = extraout_XMM0_Da_68;
  puVar1[1] = extraout_XMM0_Db_68;
  puVar1[2] = extraout_XMM0_Dc_68;
  puVar1[3] = extraout_XMM0_Dd_68;
  puVar4[-0x346] = 0x8f05c6;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1d3c];
  *puVar1 = extraout_XMM0_Da_69;
  puVar1[1] = extraout_XMM0_Db_69;
  puVar1[2] = extraout_XMM0_Dc_69;
  puVar1[3] = extraout_XMM0_Dd_69;
  puVar4[-0x2b7] = puVar4[0x1dfb];
  puVar4[-0x2b6] = puVar4[0x1dfc];
  puVar4[-0x2b5] = puVar4[0x1df9];
  puVar4[-0x2b4] = puVar4[0x1dfa];
  puVar4[-0x2b3] = puVar4[0x1df7];
  puVar4[-0x2b2] = puVar4[0x1df8];
  puVar4[-0x2b1] = puVar4[0x1df3];
  puVar4[-0x2b0] = puVar4[0x1df4];
  puVar4[-0x2af] = puVar4[0x1df1];
  puVar4[-0x2ae] = puVar4[0x1df2];
  puVar4[-0x2ad] = puVar4[0x1def];
  puVar4[-0x2ac] = puVar4[0x1df0];
  *(undefined4 *)((long)puVar4 + 0x3cd4) = 0xab1c5ed5;
  puVar4[-0x346] = 0x8f0642;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x2b9) = extraout_XMM0_Da_70;
  *(undefined4 *)((long)puVar4 + -0x15c4) = extraout_XMM0_Db_70;
  *(undefined4 *)(puVar4 + -0x2b8) = extraout_XMM0_Dc_70;
  *(undefined4 *)((long)puVar4 + -0x15bc) = extraout_XMM0_Dd_70;
  *(undefined4 *)((long)puVar4 + 0x69e4) = 0x1c;
  puVar4[-0x346] = 0x8f0663;
  anon_unknown_0::Read4((uchar *)puVar4[-0x33f],*(int *)((long)puVar4 + -0x19fc));
  *(undefined4 *)(puVar4 + 0x1ddf) = extraout_XMM0_Da_71;
  *(undefined4 *)((long)puVar4 + 0xeefc) = extraout_XMM0_Db_71;
  *(undefined4 *)(puVar4 + 0x1de0) = extraout_XMM0_Dc_71;
  *(undefined4 *)((long)puVar4 + 0xef04) = extraout_XMM0_Dd_71;
  puVar4[-0x346] = 0x8f067b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1d33] = puVar4[-0x2b7];
  puVar4[0x1d34] = puVar4[-0x2b6];
  puVar4[0x1d31] = puVar4[-0x2b5];
  puVar4[0x1d32] = puVar4[-0x2b4];
  puVar4[0x1d2f] = puVar4[-0x2b3];
  puVar4[0x1d30] = puVar4[-0x2b2];
  puVar4[0x1d2e] = puVar4[0xd0c];
  puVar4[0x1d2b] = puVar4[-0x2b1];
  puVar4[0x1d2c] = puVar4[-0x2b0];
  puVar4[0x1d29] = puVar4[-0x2af];
  puVar4[0x1d2a] = puVar4[-0x2ae];
  puVar4[0x1d27] = puVar4[-0x2ad];
  puVar4[0x1d28] = puVar4[-0x2ac];
  puVar4[0x1d26] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x1d23) = extraout_XMM0_Da_72;
  *(undefined4 *)((long)puVar4 + 0xe91c) = extraout_XMM0_Db_72;
  *(undefined4 *)(puVar4 + 0x1d24) = extraout_XMM0_Dc_72;
  *(undefined4 *)((long)puVar4 + 0xe924) = extraout_XMM0_Dd_72;
  uVar2 = ((undefined8 *)puVar4[0x1d26])[1];
  puVar4[-0x2a9] = *(undefined8 *)puVar4[0x1d26];
  puVar4[-0x2a8] = uVar2;
  puVar4[-0x346] = 0x8f0723;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x2ab) = extraout_XMM0_Da_73;
  *(undefined4 *)((long)puVar4 + -0x1554) = extraout_XMM0_Db_73;
  *(undefined4 *)(puVar4 + -0x2aa) = extraout_XMM0_Dc_73;
  *(undefined4 *)((long)puVar4 + -0x154c) = extraout_XMM0_Dd_73;
  puVar4[-0x346] = 0x8f0748;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f0768;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1d21) = extraout_XMM0_Da_74;
  *(undefined4 *)((long)puVar4 + 0xe90c) = extraout_XMM0_Db_74;
  *(undefined4 *)(puVar4 + 0x1d22) = extraout_XMM0_Dc_74;
  *(undefined4 *)((long)puVar4 + 0xe914) = extraout_XMM0_Dd_74;
  puVar4[-0x346] = 0x8f077d;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x2a7) = extraout_XMM0_Da_75;
  *(undefined4 *)((long)puVar4 + -0x1534) = extraout_XMM0_Db_75;
  *(undefined4 *)(puVar4 + -0x2a6) = extraout_XMM0_Dc_75;
  *(undefined4 *)((long)puVar4 + -0x152c) = extraout_XMM0_Dd_75;
  puVar4[-0x346] = 0x8f07a2;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f07b2;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1d1f) = extraout_XMM0_Da_76;
  *(undefined4 *)((long)puVar4 + 0xe8fc) = extraout_XMM0_Db_76;
  *(undefined4 *)(puVar4 + 0x1d20) = extraout_XMM0_Dc_76;
  *(undefined4 *)((long)puVar4 + 0xe904) = extraout_XMM0_Dd_76;
  puVar4[-0x346] = 0x8f07d2;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1d2e];
  *puVar1 = extraout_XMM0_Da_77;
  puVar1[1] = extraout_XMM0_Db_77;
  puVar1[2] = extraout_XMM0_Dc_77;
  puVar1[3] = extraout_XMM0_Dd_77;
  puVar4[-0x346] = 0x8f07f2;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1d26];
  *puVar1 = extraout_XMM0_Da_78;
  puVar1[1] = extraout_XMM0_Db_78;
  puVar1[2] = extraout_XMM0_Dc_78;
  puVar1[3] = extraout_XMM0_Dd_78;
  puVar4[-0x2a3] = puVar4[0x1dfd];
  puVar4[-0x2a2] = puVar4[0x1dfe];
  puVar4[-0x2a1] = puVar4[0x1dfb];
  puVar4[-0x2a0] = puVar4[0x1dfc];
  puVar4[-0x29f] = puVar4[0x1df9];
  puVar4[-0x29e] = puVar4[0x1dfa];
  puVar4[-0x29d] = puVar4[0x1df5];
  puVar4[-0x29c] = puVar4[0x1df6];
  puVar4[-0x29b] = puVar4[0x1df3];
  puVar4[-0x29a] = puVar4[0x1df4];
  puVar4[-0x299] = puVar4[0x1df1];
  puVar4[-0x298] = puVar4[0x1df2];
  *(undefined4 *)((long)puVar4 + 0x18e4) = 0xd807aa98;
  puVar4[-0x346] = 0x8f086e;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x2a5) = extraout_XMM0_Da_79;
  *(undefined4 *)((long)puVar4 + -0x1524) = extraout_XMM0_Db_79;
  *(undefined4 *)(puVar4 + -0x2a4) = extraout_XMM0_Dc_79;
  *(undefined4 *)((long)puVar4 + -0x151c) = extraout_XMM0_Dd_79;
  puVar4[-0x346] = 0x8f0888;
  anon_unknown_0::Read4((uchar *)puVar4[-0x33f],*(int *)((long)puVar4 + -0x19fc));
  *(undefined4 *)(puVar4 + 0x1ddd) = extraout_XMM0_Da_80;
  *(undefined4 *)((long)puVar4 + 0xeeec) = extraout_XMM0_Db_80;
  *(undefined4 *)(puVar4 + 0x1dde) = extraout_XMM0_Dc_80;
  *(undefined4 *)((long)puVar4 + 0xeef4) = extraout_XMM0_Dd_80;
  puVar4[-0x346] = 0x8f08a0;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1d1d] = puVar4[-0x2a3];
  puVar4[0x1d1e] = puVar4[-0x2a2];
  puVar4[0x1d1b] = puVar4[-0x2a1];
  puVar4[0x1d1c] = puVar4[-0x2a0];
  puVar4[0x1d19] = puVar4[-0x29f];
  puVar4[0x1d1a] = puVar4[-0x29e];
  puVar4[0x1d18] = puVar4[0xcb6];
  puVar4[0x1d15] = puVar4[-0x29d];
  puVar4[0x1d16] = puVar4[-0x29c];
  puVar4[0x1d13] = puVar4[-0x29b];
  puVar4[0x1d14] = puVar4[-0x29a];
  puVar4[0x1d11] = puVar4[-0x299];
  puVar4[0x1d12] = puVar4[-0x298];
  puVar4[0x1d10] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x1d0d) = extraout_XMM0_Da_81;
  *(undefined4 *)((long)puVar4 + 0xe86c) = extraout_XMM0_Db_81;
  *(undefined4 *)(puVar4 + 0x1d0e) = extraout_XMM0_Dc_81;
  *(undefined4 *)((long)puVar4 + 0xe874) = extraout_XMM0_Dd_81;
  uVar2 = ((undefined8 *)puVar4[0x1d10])[1];
  puVar4[-0x295] = *(undefined8 *)puVar4[0x1d10];
  puVar4[-0x294] = uVar2;
  puVar4[-0x346] = 0x8f0948;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x297) = extraout_XMM0_Da_82;
  *(undefined4 *)((long)puVar4 + -0x14b4) = extraout_XMM0_Db_82;
  *(undefined4 *)(puVar4 + -0x296) = extraout_XMM0_Dc_82;
  *(undefined4 *)((long)puVar4 + -0x14ac) = extraout_XMM0_Dd_82;
  puVar4[-0x346] = 0x8f096d;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f098d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1d0b) = extraout_XMM0_Da_83;
  *(undefined4 *)((long)puVar4 + 0xe85c) = extraout_XMM0_Db_83;
  *(undefined4 *)(puVar4 + 0x1d0c) = extraout_XMM0_Dc_83;
  *(undefined4 *)((long)puVar4 + 0xe864) = extraout_XMM0_Dd_83;
  puVar4[-0x346] = 0x8f09a2;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x293) = extraout_XMM0_Da_84;
  *(undefined4 *)((long)puVar4 + -0x1494) = extraout_XMM0_Db_84;
  *(undefined4 *)(puVar4 + -0x292) = extraout_XMM0_Dc_84;
  *(undefined4 *)((long)puVar4 + -0x148c) = extraout_XMM0_Dd_84;
  puVar4[-0x346] = 0x8f09c7;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f09d7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1d09) = extraout_XMM0_Da_85;
  *(undefined4 *)((long)puVar4 + 0xe84c) = extraout_XMM0_Db_85;
  *(undefined4 *)(puVar4 + 0x1d0a) = extraout_XMM0_Dc_85;
  *(undefined4 *)((long)puVar4 + 0xe854) = extraout_XMM0_Dd_85;
  puVar4[-0x346] = 0x8f09f7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1d18];
  *puVar1 = extraout_XMM0_Da_86;
  puVar1[1] = extraout_XMM0_Db_86;
  puVar1[2] = extraout_XMM0_Dc_86;
  puVar1[3] = extraout_XMM0_Dd_86;
  puVar4[-0x346] = 0x8f0a17;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1d10];
  *puVar1 = extraout_XMM0_Da_87;
  puVar1[1] = extraout_XMM0_Db_87;
  puVar1[2] = extraout_XMM0_Dc_87;
  puVar1[3] = extraout_XMM0_Dd_87;
  puVar4[-0x28f] = puVar4[0x1def];
  puVar4[-0x28e] = puVar4[0x1df0];
  puVar4[-0x28d] = puVar4[0x1dfd];
  puVar4[-0x28c] = puVar4[0x1dfe];
  puVar4[-0x28b] = puVar4[0x1dfb];
  puVar4[-0x28a] = puVar4[0x1dfc];
  puVar4[-0x289] = puVar4[0x1df7];
  puVar4[-0x288] = puVar4[0x1df8];
  puVar4[-0x287] = puVar4[0x1df5];
  puVar4[-0x286] = puVar4[0x1df6];
  puVar4[-0x285] = puVar4[0x1df3];
  puVar4[-0x284] = puVar4[0x1df4];
  *(undefined4 *)((long)puVar4 + 0x3e04) = 0x12835b01;
  puVar4[-0x346] = 0x8f0a93;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x291) = extraout_XMM0_Da_88;
  *(undefined4 *)((long)puVar4 + -0x1484) = extraout_XMM0_Db_88;
  *(undefined4 *)(puVar4 + -0x290) = extraout_XMM0_Dc_88;
  *(undefined4 *)((long)puVar4 + -0x147c) = extraout_XMM0_Dd_88;
  puVar4[-0x346] = 0x8f0aad;
  anon_unknown_0::Read4((uchar *)puVar4[-0x33f],*(int *)((long)puVar4 + -0x19fc));
  *(undefined4 *)(puVar4 + 0x1ddb) = extraout_XMM0_Da_89;
  *(undefined4 *)((long)puVar4 + 0xeedc) = extraout_XMM0_Db_89;
  *(undefined4 *)(puVar4 + 0x1ddc) = extraout_XMM0_Dc_89;
  *(undefined4 *)((long)puVar4 + 0xeee4) = extraout_XMM0_Dd_89;
  puVar4[-0x346] = 0x8f0ac5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1d07] = puVar4[-0x28f];
  puVar4[0x1d08] = puVar4[-0x28e];
  puVar4[0x1d05] = puVar4[-0x28d];
  puVar4[0x1d06] = puVar4[-0x28c];
  puVar4[0x1d03] = puVar4[-0x28b];
  puVar4[0x1d04] = puVar4[-0x28a];
  puVar4[0x1d02] = puVar4[0xcd4];
  puVar4[0x1cff] = puVar4[-0x289];
  puVar4[0x1d00] = puVar4[-0x288];
  puVar4[0x1cfd] = puVar4[-0x287];
  puVar4[0x1cfe] = puVar4[-0x286];
  puVar4[0x1cfb] = puVar4[-0x285];
  puVar4[0x1cfc] = puVar4[-0x284];
  puVar4[0x1cfa] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x1cf7) = extraout_XMM0_Da_90;
  *(undefined4 *)((long)puVar4 + 0xe7bc) = extraout_XMM0_Db_90;
  *(undefined4 *)(puVar4 + 0x1cf8) = extraout_XMM0_Dc_90;
  *(undefined4 *)((long)puVar4 + 0xe7c4) = extraout_XMM0_Dd_90;
  uVar2 = ((undefined8 *)puVar4[0x1cfa])[1];
  puVar4[-0x281] = *(undefined8 *)puVar4[0x1cfa];
  puVar4[-0x280] = uVar2;
  puVar4[-0x346] = 0x8f0b6d;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x283) = extraout_XMM0_Da_91;
  *(undefined4 *)((long)puVar4 + -0x1414) = extraout_XMM0_Db_91;
  *(undefined4 *)(puVar4 + -0x282) = extraout_XMM0_Dc_91;
  *(undefined4 *)((long)puVar4 + -0x140c) = extraout_XMM0_Dd_91;
  puVar4[-0x346] = 0x8f0b92;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f0bb2;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1cf5) = extraout_XMM0_Da_92;
  *(undefined4 *)((long)puVar4 + 0xe7ac) = extraout_XMM0_Db_92;
  *(undefined4 *)(puVar4 + 0x1cf6) = extraout_XMM0_Dc_92;
  *(undefined4 *)((long)puVar4 + 0xe7b4) = extraout_XMM0_Dd_92;
  puVar4[-0x346] = 0x8f0bc7;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x27f) = extraout_XMM0_Da_93;
  *(undefined4 *)((long)puVar4 + -0x13f4) = extraout_XMM0_Db_93;
  *(undefined4 *)(puVar4 + -0x27e) = extraout_XMM0_Dc_93;
  *(undefined4 *)((long)puVar4 + -0x13ec) = extraout_XMM0_Dd_93;
  puVar4[-0x346] = 0x8f0bec;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f0bfc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1cf3) = extraout_XMM0_Da_94;
  *(undefined4 *)((long)puVar4 + 0xe79c) = extraout_XMM0_Db_94;
  *(undefined4 *)(puVar4 + 0x1cf4) = extraout_XMM0_Dc_94;
  *(undefined4 *)((long)puVar4 + 0xe7a4) = extraout_XMM0_Dd_94;
  puVar4[-0x346] = 0x8f0c1c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1d02];
  *puVar1 = extraout_XMM0_Da_95;
  puVar1[1] = extraout_XMM0_Db_95;
  puVar1[2] = extraout_XMM0_Dc_95;
  puVar1[3] = extraout_XMM0_Dd_95;
  puVar4[-0x346] = 0x8f0c3c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1cfa];
  *puVar1 = extraout_XMM0_Da_96;
  puVar1[1] = extraout_XMM0_Db_96;
  puVar1[2] = extraout_XMM0_Dc_96;
  puVar1[3] = extraout_XMM0_Dd_96;
  puVar4[-0x27b] = puVar4[0x1df1];
  puVar4[-0x27a] = puVar4[0x1df2];
  puVar4[-0x279] = puVar4[0x1def];
  puVar4[-0x278] = puVar4[0x1df0];
  puVar4[-0x277] = puVar4[0x1dfd];
  puVar4[-0x276] = puVar4[0x1dfe];
  puVar4[-0x275] = puVar4[0x1df9];
  puVar4[-0x274] = puVar4[0x1dfa];
  puVar4[-0x273] = puVar4[0x1df7];
  puVar4[-0x272] = puVar4[0x1df8];
  puVar4[-0x271] = puVar4[0x1df5];
  puVar4[-0x270] = puVar4[0x1df6];
  *(undefined4 *)((long)puVar4 + 0x3ea4) = 0x243185be;
  puVar4[-0x346] = 0x8f0cb8;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x27d) = extraout_XMM0_Da_97;
  *(undefined4 *)((long)puVar4 + -0x13e4) = extraout_XMM0_Db_97;
  *(undefined4 *)(puVar4 + -0x27c) = extraout_XMM0_Dc_97;
  *(undefined4 *)((long)puVar4 + -0x13dc) = extraout_XMM0_Dd_97;
  puVar4[-0x346] = 0x8f0cd2;
  anon_unknown_0::Read4((uchar *)puVar4[-0x33f],*(int *)((long)puVar4 + -0x19fc));
  *(undefined4 *)(puVar4 + 0x1dd9) = extraout_XMM0_Da_98;
  *(undefined4 *)((long)puVar4 + 0xeecc) = extraout_XMM0_Db_98;
  *(undefined4 *)(puVar4 + 0x1dda) = extraout_XMM0_Dc_98;
  *(undefined4 *)((long)puVar4 + 0xeed4) = extraout_XMM0_Dd_98;
  puVar4[-0x346] = 0x8f0cea;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1cf1] = puVar4[-0x27b];
  puVar4[0x1cf2] = puVar4[-0x27a];
  puVar4[0x1cef] = puVar4[-0x279];
  puVar4[0x1cf0] = puVar4[-0x278];
  puVar4[0x1ced] = puVar4[-0x277];
  puVar4[0x1cee] = puVar4[-0x276];
  puVar4[0x1cec] = puVar4[0xcf4];
  puVar4[0x1ce9] = puVar4[-0x275];
  puVar4[0x1cea] = puVar4[-0x274];
  puVar4[0x1ce7] = puVar4[-0x273];
  puVar4[0x1ce8] = puVar4[-0x272];
  puVar4[0x1ce5] = puVar4[-0x271];
  puVar4[0x1ce6] = puVar4[-0x270];
  puVar4[0x1ce4] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x1ce1) = extraout_XMM0_Da_99;
  *(undefined4 *)((long)puVar4 + 0xe70c) = extraout_XMM0_Db_99;
  *(undefined4 *)(puVar4 + 0x1ce2) = extraout_XMM0_Dc_99;
  *(undefined4 *)((long)puVar4 + 0xe714) = extraout_XMM0_Dd_99;
  uVar2 = ((undefined8 *)puVar4[0x1ce4])[1];
  puVar4[-0x26d] = *(undefined8 *)puVar4[0x1ce4];
  puVar4[-0x26c] = uVar2;
  puVar4[-0x346] = 0x8f0d92;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x26f) = extraout_XMM0_Da_x00100;
  *(undefined4 *)((long)puVar4 + -0x1374) = extraout_XMM0_Db_x00100;
  *(undefined4 *)(puVar4 + -0x26e) = extraout_XMM0_Dc_x00100;
  *(undefined4 *)((long)puVar4 + -0x136c) = extraout_XMM0_Dd_x00100;
  puVar4[-0x346] = 0x8f0db7;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f0dd7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1cdf) = extraout_XMM0_Da_x00101;
  *(undefined4 *)((long)puVar4 + 0xe6fc) = extraout_XMM0_Db_x00101;
  *(undefined4 *)(puVar4 + 0x1ce0) = extraout_XMM0_Dc_x00101;
  *(undefined4 *)((long)puVar4 + 0xe704) = extraout_XMM0_Dd_x00101;
  puVar4[-0x346] = 0x8f0dec;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x26b) = extraout_XMM0_Da_x00102;
  *(undefined4 *)((long)puVar4 + -0x1354) = extraout_XMM0_Db_x00102;
  *(undefined4 *)(puVar4 + -0x26a) = extraout_XMM0_Dc_x00102;
  *(undefined4 *)((long)puVar4 + -0x134c) = extraout_XMM0_Dd_x00102;
  puVar4[-0x346] = 0x8f0e11;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f0e21;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1cdd) = extraout_XMM0_Da_x00103;
  *(undefined4 *)((long)puVar4 + 0xe6ec) = extraout_XMM0_Db_x00103;
  *(undefined4 *)(puVar4 + 0x1cde) = extraout_XMM0_Dc_x00103;
  *(undefined4 *)((long)puVar4 + 0xe6f4) = extraout_XMM0_Dd_x00103;
  puVar4[-0x346] = 0x8f0e41;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1cec];
  *puVar1 = extraout_XMM0_Da_x00104;
  puVar1[1] = extraout_XMM0_Db_x00104;
  puVar1[2] = extraout_XMM0_Dc_x00104;
  puVar1[3] = extraout_XMM0_Dd_x00104;
  puVar4[-0x346] = 0x8f0e61;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1ce4];
  *puVar1 = extraout_XMM0_Da_x00105;
  puVar1[1] = extraout_XMM0_Db_x00105;
  puVar1[2] = extraout_XMM0_Dc_x00105;
  puVar1[3] = extraout_XMM0_Dd_x00105;
  puVar4[-0x267] = puVar4[0x1df3];
  puVar4[-0x266] = puVar4[0x1df4];
  puVar4[-0x265] = puVar4[0x1df1];
  puVar4[-0x264] = puVar4[0x1df2];
  puVar4[-0x263] = puVar4[0x1def];
  puVar4[-0x262] = puVar4[0x1df0];
  puVar4[-0x261] = puVar4[0x1dfb];
  puVar4[-0x260] = puVar4[0x1dfc];
  puVar4[-0x25f] = puVar4[0x1df9];
  puVar4[-0x25e] = puVar4[0x1dfa];
  puVar4[-0x25d] = puVar4[0x1df7];
  puVar4[-0x25c] = puVar4[0x1df8];
  *(undefined4 *)((long)puVar4 + 0x3f44) = 0x550c7dc3;
  puVar4[-0x346] = 0x8f0edd;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x269) = extraout_XMM0_Da_x00106;
  *(undefined4 *)((long)puVar4 + -0x1344) = extraout_XMM0_Db_x00106;
  *(undefined4 *)(puVar4 + -0x268) = extraout_XMM0_Dc_x00106;
  *(undefined4 *)((long)puVar4 + -0x133c) = extraout_XMM0_Dd_x00106;
  puVar4[-0x346] = 0x8f0ef7;
  anon_unknown_0::Read4((uchar *)puVar4[-0x33f],*(int *)((long)puVar4 + -0x19fc));
  *(undefined4 *)(puVar4 + 0x1dd7) = extraout_XMM0_Da_x00107;
  *(undefined4 *)((long)puVar4 + 0xeebc) = extraout_XMM0_Db_x00107;
  *(undefined4 *)(puVar4 + 0x1dd8) = extraout_XMM0_Dc_x00107;
  *(undefined4 *)((long)puVar4 + 0xeec4) = extraout_XMM0_Dd_x00107;
  puVar4[-0x346] = 0x8f0f0f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1cdb] = puVar4[-0x267];
  puVar4[0x1cdc] = puVar4[-0x266];
  puVar4[0x1cd9] = puVar4[-0x265];
  puVar4[0x1cda] = puVar4[-0x264];
  puVar4[0x1cd7] = puVar4[-0x263];
  puVar4[0x1cd8] = puVar4[-0x262];
  puVar4[0x1cd6] = puVar4[0xd14];
  puVar4[0x1cd3] = puVar4[-0x261];
  puVar4[0x1cd4] = puVar4[-0x260];
  puVar4[0x1cd1] = puVar4[-0x25f];
  puVar4[0x1cd2] = puVar4[-0x25e];
  puVar4[0x1ccf] = puVar4[-0x25d];
  puVar4[0x1cd0] = puVar4[-0x25c];
  puVar4[0x1cce] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x1ccb) = extraout_XMM0_Da_x00108;
  *(undefined4 *)((long)puVar4 + 0xe65c) = extraout_XMM0_Db_x00108;
  *(undefined4 *)(puVar4 + 0x1ccc) = extraout_XMM0_Dc_x00108;
  *(undefined4 *)((long)puVar4 + 0xe664) = extraout_XMM0_Dd_x00108;
  uVar2 = ((undefined8 *)puVar4[0x1cce])[1];
  puVar4[-0x259] = *(undefined8 *)puVar4[0x1cce];
  puVar4[-600] = uVar2;
  puVar4[-0x346] = 0x8f0fb7;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x25b) = extraout_XMM0_Da_x00109;
  *(undefined4 *)((long)puVar4 + -0x12d4) = extraout_XMM0_Db_x00109;
  *(undefined4 *)(puVar4 + -0x25a) = extraout_XMM0_Dc_x00109;
  *(undefined4 *)((long)puVar4 + -0x12cc) = extraout_XMM0_Dd_x00109;
  puVar4[-0x346] = 0x8f0fdc;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f0ffc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1cc9) = extraout_XMM0_Da_x00110;
  *(undefined4 *)((long)puVar4 + 0xe64c) = extraout_XMM0_Db_x00110;
  *(undefined4 *)(puVar4 + 0x1cca) = extraout_XMM0_Dc_x00110;
  *(undefined4 *)((long)puVar4 + 0xe654) = extraout_XMM0_Dd_x00110;
  puVar4[-0x346] = 0x8f1011;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -599) = extraout_XMM0_Da_x00111;
  *(undefined4 *)((long)puVar4 + -0x12b4) = extraout_XMM0_Db_x00111;
  *(undefined4 *)(puVar4 + -0x256) = extraout_XMM0_Dc_x00111;
  *(undefined4 *)((long)puVar4 + -0x12ac) = extraout_XMM0_Dd_x00111;
  puVar4[-0x346] = 0x8f1036;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f1046;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1cc7) = extraout_XMM0_Da_x00112;
  *(undefined4 *)((long)puVar4 + 0xe63c) = extraout_XMM0_Db_x00112;
  *(undefined4 *)(puVar4 + 0x1cc8) = extraout_XMM0_Dc_x00112;
  *(undefined4 *)((long)puVar4 + 0xe644) = extraout_XMM0_Dd_x00112;
  puVar4[-0x346] = 0x8f1066;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1cd6];
  *puVar1 = extraout_XMM0_Da_x00113;
  puVar1[1] = extraout_XMM0_Db_x00113;
  puVar1[2] = extraout_XMM0_Dc_x00113;
  puVar1[3] = extraout_XMM0_Dd_x00113;
  puVar4[-0x346] = 0x8f1086;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1cce];
  *puVar1 = extraout_XMM0_Da_x00114;
  puVar1[1] = extraout_XMM0_Db_x00114;
  puVar1[2] = extraout_XMM0_Dc_x00114;
  puVar1[3] = extraout_XMM0_Dd_x00114;
  puVar4[-0x253] = puVar4[0x1df5];
  puVar4[-0x252] = puVar4[0x1df6];
  puVar4[-0x251] = puVar4[0x1df3];
  puVar4[-0x250] = puVar4[0x1df4];
  puVar4[-0x24f] = puVar4[0x1df1];
  puVar4[-0x24e] = puVar4[0x1df2];
  puVar4[-0x24d] = puVar4[0x1dfd];
  puVar4[-0x24c] = puVar4[0x1dfe];
  puVar4[-0x24b] = puVar4[0x1dfb];
  puVar4[-0x24a] = puVar4[0x1dfc];
  puVar4[-0x249] = puVar4[0x1df9];
  puVar4[-0x248] = puVar4[0x1dfa];
  *(undefined4 *)((long)puVar4 + 0x3fe4) = 0x72be5d74;
  puVar4[-0x346] = 0x8f1102;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x255) = extraout_XMM0_Da_x00115;
  *(undefined4 *)((long)puVar4 + -0x12a4) = extraout_XMM0_Db_x00115;
  *(undefined4 *)(puVar4 + -0x254) = extraout_XMM0_Dc_x00115;
  *(undefined4 *)((long)puVar4 + -0x129c) = extraout_XMM0_Dd_x00115;
  puVar4[-0x346] = 0x8f111c;
  anon_unknown_0::Read4((uchar *)puVar4[-0x33f],*(int *)((long)puVar4 + -0x19fc));
  *(undefined4 *)(puVar4 + 0x1dd5) = extraout_XMM0_Da_x00116;
  *(undefined4 *)((long)puVar4 + 0xeeac) = extraout_XMM0_Db_x00116;
  *(undefined4 *)(puVar4 + 0x1dd6) = extraout_XMM0_Dc_x00116;
  *(undefined4 *)((long)puVar4 + 0xeeb4) = extraout_XMM0_Dd_x00116;
  puVar4[-0x346] = 0x8f1134;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1cc5] = puVar4[-0x253];
  puVar4[0x1cc6] = puVar4[-0x252];
  puVar4[0x1cc3] = puVar4[-0x251];
  puVar4[0x1cc4] = puVar4[-0x250];
  puVar4[0x1cc1] = puVar4[-0x24f];
  puVar4[0x1cc2] = puVar4[-0x24e];
  puVar4[0x1cc0] = puVar4[0xcae];
  puVar4[0x1cbd] = puVar4[-0x24d];
  puVar4[0x1cbe] = puVar4[-0x24c];
  puVar4[0x1cbb] = puVar4[-0x24b];
  puVar4[0x1cbc] = puVar4[-0x24a];
  puVar4[0x1cb9] = puVar4[-0x249];
  puVar4[0x1cba] = puVar4[-0x248];
  puVar4[0x1cb8] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x1cb5) = extraout_XMM0_Da_x00117;
  *(undefined4 *)((long)puVar4 + 0xe5ac) = extraout_XMM0_Db_x00117;
  *(undefined4 *)(puVar4 + 0x1cb6) = extraout_XMM0_Dc_x00117;
  *(undefined4 *)((long)puVar4 + 0xe5b4) = extraout_XMM0_Dd_x00117;
  uVar2 = ((undefined8 *)puVar4[0x1cb8])[1];
  puVar4[-0x245] = *(undefined8 *)puVar4[0x1cb8];
  puVar4[-0x244] = uVar2;
  puVar4[-0x346] = 0x8f11dc;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x247) = extraout_XMM0_Da_x00118;
  *(undefined4 *)((long)puVar4 + -0x1234) = extraout_XMM0_Db_x00118;
  *(undefined4 *)(puVar4 + -0x246) = extraout_XMM0_Dc_x00118;
  *(undefined4 *)((long)puVar4 + -0x122c) = extraout_XMM0_Dd_x00118;
  puVar4[-0x346] = 0x8f1201;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f1221;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1cb3) = extraout_XMM0_Da_x00119;
  *(undefined4 *)((long)puVar4 + 0xe59c) = extraout_XMM0_Db_x00119;
  *(undefined4 *)(puVar4 + 0x1cb4) = extraout_XMM0_Dc_x00119;
  *(undefined4 *)((long)puVar4 + 0xe5a4) = extraout_XMM0_Dd_x00119;
  puVar4[-0x346] = 0x8f1236;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x243) = extraout_XMM0_Da_x00120;
  *(undefined4 *)((long)puVar4 + -0x1214) = extraout_XMM0_Db_x00120;
  *(undefined4 *)(puVar4 + -0x242) = extraout_XMM0_Dc_x00120;
  *(undefined4 *)((long)puVar4 + -0x120c) = extraout_XMM0_Dd_x00120;
  puVar4[-0x346] = 0x8f125b;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f126b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1cb1) = extraout_XMM0_Da_x00121;
  *(undefined4 *)((long)puVar4 + 0xe58c) = extraout_XMM0_Db_x00121;
  *(undefined4 *)(puVar4 + 0x1cb2) = extraout_XMM0_Dc_x00121;
  *(undefined4 *)((long)puVar4 + 0xe594) = extraout_XMM0_Dd_x00121;
  puVar4[-0x346] = 0x8f128b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1cc0];
  *puVar1 = extraout_XMM0_Da_x00122;
  puVar1[1] = extraout_XMM0_Db_x00122;
  puVar1[2] = extraout_XMM0_Dc_x00122;
  puVar1[3] = extraout_XMM0_Dd_x00122;
  puVar4[-0x346] = 0x8f12ab;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1cb8];
  *puVar1 = extraout_XMM0_Da_x00123;
  puVar1[1] = extraout_XMM0_Db_x00123;
  puVar1[2] = extraout_XMM0_Dc_x00123;
  puVar1[3] = extraout_XMM0_Dd_x00123;
  puVar4[-0x23f] = puVar4[0x1df7];
  puVar4[-0x23e] = puVar4[0x1df8];
  puVar4[-0x23d] = puVar4[0x1df5];
  puVar4[-0x23c] = puVar4[0x1df6];
  puVar4[-0x23b] = puVar4[0x1df3];
  puVar4[-0x23a] = puVar4[0x1df4];
  puVar4[-0x239] = puVar4[0x1def];
  puVar4[-0x238] = puVar4[0x1df0];
  puVar4[-0x237] = puVar4[0x1dfd];
  puVar4[-0x236] = puVar4[0x1dfe];
  puVar4[-0x235] = puVar4[0x1dfb];
  puVar4[-0x234] = puVar4[0x1dfc];
  *(undefined4 *)((long)puVar4 + 0x4084) = 0x80deb1fe;
  puVar4[-0x346] = 0x8f1327;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x241) = extraout_XMM0_Da_x00124;
  *(undefined4 *)((long)puVar4 + -0x1204) = extraout_XMM0_Db_x00124;
  *(undefined4 *)(puVar4 + -0x240) = extraout_XMM0_Dc_x00124;
  *(undefined4 *)((long)puVar4 + -0x11fc) = extraout_XMM0_Dd_x00124;
  puVar4[-0x346] = 0x8f1341;
  anon_unknown_0::Read4((uchar *)puVar4[-0x33f],*(int *)((long)puVar4 + -0x19fc));
  *(undefined4 *)(puVar4 + 0x1dd3) = extraout_XMM0_Da_x00125;
  *(undefined4 *)((long)puVar4 + 0xee9c) = extraout_XMM0_Db_x00125;
  *(undefined4 *)(puVar4 + 0x1dd4) = extraout_XMM0_Dc_x00125;
  *(undefined4 *)((long)puVar4 + 0xeea4) = extraout_XMM0_Dd_x00125;
  puVar4[-0x346] = 0x8f1359;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1caf] = puVar4[-0x23f];
  puVar4[0x1cb0] = puVar4[-0x23e];
  puVar4[0x1cad] = puVar4[-0x23d];
  puVar4[0x1cae] = puVar4[-0x23c];
  puVar4[0x1cab] = puVar4[-0x23b];
  puVar4[0x1cac] = puVar4[-0x23a];
  puVar4[0x1caa] = puVar4[0xccc];
  puVar4[0x1ca7] = puVar4[-0x239];
  puVar4[0x1ca8] = puVar4[-0x238];
  puVar4[0x1ca5] = puVar4[-0x237];
  puVar4[0x1ca6] = puVar4[-0x236];
  puVar4[0x1ca3] = puVar4[-0x235];
  puVar4[0x1ca4] = puVar4[-0x234];
  puVar4[0x1ca2] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x1c9f) = extraout_XMM0_Da_x00126;
  *(undefined4 *)((long)puVar4 + 0xe4fc) = extraout_XMM0_Db_x00126;
  *(undefined4 *)(puVar4 + 0x1ca0) = extraout_XMM0_Dc_x00126;
  *(undefined4 *)((long)puVar4 + 0xe504) = extraout_XMM0_Dd_x00126;
  uVar2 = ((undefined8 *)puVar4[0x1ca2])[1];
  puVar4[-0x231] = *(undefined8 *)puVar4[0x1ca2];
  puVar4[-0x230] = uVar2;
  puVar4[-0x346] = 0x8f1401;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x233) = extraout_XMM0_Da_x00127;
  *(undefined4 *)((long)puVar4 + -0x1194) = extraout_XMM0_Db_x00127;
  *(undefined4 *)(puVar4 + -0x232) = extraout_XMM0_Dc_x00127;
  *(undefined4 *)((long)puVar4 + -0x118c) = extraout_XMM0_Dd_x00127;
  puVar4[-0x346] = 0x8f1426;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f1446;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1c9d) = extraout_XMM0_Da_x00128;
  *(undefined4 *)((long)puVar4 + 0xe4ec) = extraout_XMM0_Db_x00128;
  *(undefined4 *)(puVar4 + 0x1c9e) = extraout_XMM0_Dc_x00128;
  *(undefined4 *)((long)puVar4 + 0xe4f4) = extraout_XMM0_Dd_x00128;
  puVar4[-0x346] = 0x8f145b;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x22f) = extraout_XMM0_Da_x00129;
  *(undefined4 *)((long)puVar4 + -0x1174) = extraout_XMM0_Db_x00129;
  *(undefined4 *)(puVar4 + -0x22e) = extraout_XMM0_Dc_x00129;
  *(undefined4 *)((long)puVar4 + -0x116c) = extraout_XMM0_Dd_x00129;
  puVar4[-0x346] = 0x8f1480;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f1490;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1c9b) = extraout_XMM0_Da_x00130;
  *(undefined4 *)((long)puVar4 + 0xe4dc) = extraout_XMM0_Db_x00130;
  *(undefined4 *)(puVar4 + 0x1c9c) = extraout_XMM0_Dc_x00130;
  *(undefined4 *)((long)puVar4 + 0xe4e4) = extraout_XMM0_Dd_x00130;
  puVar4[-0x346] = 0x8f14b0;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1caa];
  *puVar1 = extraout_XMM0_Da_x00131;
  puVar1[1] = extraout_XMM0_Db_x00131;
  puVar1[2] = extraout_XMM0_Dc_x00131;
  puVar1[3] = extraout_XMM0_Dd_x00131;
  puVar4[-0x346] = 0x8f14d0;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1ca2];
  *puVar1 = extraout_XMM0_Da_x00132;
  puVar1[1] = extraout_XMM0_Db_x00132;
  puVar1[2] = extraout_XMM0_Dc_x00132;
  puVar1[3] = extraout_XMM0_Dd_x00132;
  puVar4[-0x22b] = puVar4[0x1df9];
  puVar4[-0x22a] = puVar4[0x1dfa];
  puVar4[-0x229] = puVar4[0x1df7];
  puVar4[-0x228] = puVar4[0x1df8];
  puVar4[-0x227] = puVar4[0x1df5];
  puVar4[-0x226] = puVar4[0x1df6];
  puVar4[-0x225] = puVar4[0x1df1];
  puVar4[-0x224] = puVar4[0x1df2];
  puVar4[-0x223] = puVar4[0x1def];
  puVar4[-0x222] = puVar4[0x1df0];
  puVar4[-0x221] = puVar4[0x1dfd];
  puVar4[-0x220] = puVar4[0x1dfe];
  *(undefined4 *)((long)puVar4 + 0x4124) = 0x9bdc06a7;
  puVar4[-0x346] = 0x8f154c;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x22d) = extraout_XMM0_Da_x00133;
  *(undefined4 *)((long)puVar4 + -0x1164) = extraout_XMM0_Db_x00133;
  *(undefined4 *)(puVar4 + -0x22c) = extraout_XMM0_Dc_x00133;
  *(undefined4 *)((long)puVar4 + -0x115c) = extraout_XMM0_Dd_x00133;
  puVar4[-0x346] = 0x8f1566;
  anon_unknown_0::Read4((uchar *)puVar4[-0x33f],*(int *)((long)puVar4 + -0x19fc));
  *(undefined4 *)(puVar4 + 0x1dd1) = extraout_XMM0_Da_x00134;
  *(undefined4 *)((long)puVar4 + 0xee8c) = extraout_XMM0_Db_x00134;
  *(undefined4 *)(puVar4 + 0x1dd2) = extraout_XMM0_Dc_x00134;
  *(undefined4 *)((long)puVar4 + 0xee94) = extraout_XMM0_Dd_x00134;
  puVar4[-0x346] = 0x8f157e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1c99] = puVar4[-0x22b];
  puVar4[0x1c9a] = puVar4[-0x22a];
  puVar4[0x1c97] = puVar4[-0x229];
  puVar4[0x1c98] = puVar4[-0x228];
  puVar4[0x1c95] = puVar4[-0x227];
  puVar4[0x1c96] = puVar4[-0x226];
  puVar4[0x1c94] = puVar4[0xcec];
  puVar4[0x1c91] = puVar4[-0x225];
  puVar4[0x1c92] = puVar4[-0x224];
  puVar4[0x1c8f] = puVar4[-0x223];
  puVar4[0x1c90] = puVar4[-0x222];
  puVar4[0x1c8d] = puVar4[-0x221];
  puVar4[0x1c8e] = puVar4[-0x220];
  puVar4[0x1c8c] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x1c89) = extraout_XMM0_Da_x00135;
  *(undefined4 *)((long)puVar4 + 0xe44c) = extraout_XMM0_Db_x00135;
  *(undefined4 *)(puVar4 + 0x1c8a) = extraout_XMM0_Dc_x00135;
  *(undefined4 *)((long)puVar4 + 0xe454) = extraout_XMM0_Dd_x00135;
  uVar2 = ((undefined8 *)puVar4[0x1c8c])[1];
  puVar4[-0x21d] = *(undefined8 *)puVar4[0x1c8c];
  puVar4[-0x21c] = uVar2;
  puVar4[-0x346] = 0x8f1626;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x21f) = extraout_XMM0_Da_x00136;
  *(undefined4 *)((long)puVar4 + -0x10f4) = extraout_XMM0_Db_x00136;
  *(undefined4 *)(puVar4 + -0x21e) = extraout_XMM0_Dc_x00136;
  *(undefined4 *)((long)puVar4 + -0x10ec) = extraout_XMM0_Dd_x00136;
  puVar4[-0x346] = 0x8f164b;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f166b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1c87) = extraout_XMM0_Da_x00137;
  *(undefined4 *)((long)puVar4 + 0xe43c) = extraout_XMM0_Db_x00137;
  *(undefined4 *)(puVar4 + 0x1c88) = extraout_XMM0_Dc_x00137;
  *(undefined4 *)((long)puVar4 + 0xe444) = extraout_XMM0_Dd_x00137;
  puVar4[-0x346] = 0x8f1680;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x21b) = extraout_XMM0_Da_x00138;
  *(undefined4 *)((long)puVar4 + -0x10d4) = extraout_XMM0_Db_x00138;
  *(undefined4 *)(puVar4 + -0x21a) = extraout_XMM0_Dc_x00138;
  *(undefined4 *)((long)puVar4 + -0x10cc) = extraout_XMM0_Dd_x00138;
  puVar4[-0x346] = 0x8f16a5;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f16b5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1c85) = extraout_XMM0_Da_x00139;
  *(undefined4 *)((long)puVar4 + 0xe42c) = extraout_XMM0_Db_x00139;
  *(undefined4 *)(puVar4 + 0x1c86) = extraout_XMM0_Dc_x00139;
  *(undefined4 *)((long)puVar4 + 0xe434) = extraout_XMM0_Dd_x00139;
  puVar4[-0x346] = 0x8f16d5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1c94];
  *puVar1 = extraout_XMM0_Da_x00140;
  puVar1[1] = extraout_XMM0_Db_x00140;
  puVar1[2] = extraout_XMM0_Dc_x00140;
  puVar1[3] = extraout_XMM0_Dd_x00140;
  puVar4[-0x346] = 0x8f16f5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1c8c];
  *puVar1 = extraout_XMM0_Da_x00141;
  puVar1[1] = extraout_XMM0_Db_x00141;
  puVar1[2] = extraout_XMM0_Dc_x00141;
  puVar1[3] = extraout_XMM0_Dd_x00141;
  puVar4[-0x217] = puVar4[0x1dfb];
  puVar4[-0x216] = puVar4[0x1dfc];
  puVar4[-0x215] = puVar4[0x1df9];
  puVar4[-0x214] = puVar4[0x1dfa];
  puVar4[-0x213] = puVar4[0x1df7];
  puVar4[-0x212] = puVar4[0x1df8];
  puVar4[-0x211] = puVar4[0x1df3];
  puVar4[-0x210] = puVar4[0x1df4];
  puVar4[-0x20f] = puVar4[0x1df1];
  puVar4[-0x20e] = puVar4[0x1df2];
  puVar4[-0x20d] = puVar4[0x1def];
  puVar4[-0x20c] = puVar4[0x1df0];
  puVar4[-0x346] = 0x8f176a;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x219) = extraout_XMM0_Da_x00142;
  *(undefined4 *)((long)puVar4 + -0x10c4) = extraout_XMM0_Db_x00142;
  *(undefined4 *)(puVar4 + -0x218) = extraout_XMM0_Dc_x00142;
  *(undefined4 *)((long)puVar4 + -0x10bc) = extraout_XMM0_Dd_x00142;
  puVar4[-0x346] = 0x8f1784;
  anon_unknown_0::Read4((uchar *)puVar4[-0x33f],*(int *)((long)puVar4 + -0x19fc));
  *(undefined4 *)(puVar4 + 0x1dcf) = extraout_XMM0_Da_x00143;
  *(undefined4 *)((long)puVar4 + 0xee7c) = extraout_XMM0_Db_x00143;
  *(undefined4 *)(puVar4 + 0x1dd0) = extraout_XMM0_Dc_x00143;
  *(undefined4 *)((long)puVar4 + 0xee84) = extraout_XMM0_Dd_x00143;
  puVar4[-0x346] = 0x8f179c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1c83] = puVar4[-0x217];
  puVar4[0x1c84] = puVar4[-0x216];
  puVar4[0x1c81] = puVar4[-0x215];
  puVar4[0x1c82] = puVar4[-0x214];
  puVar4[0x1c7f] = puVar4[-0x213];
  puVar4[0x1c80] = puVar4[-0x212];
  puVar4[0x1c7e] = puVar4[0xd0c];
  puVar4[0x1c7b] = puVar4[-0x211];
  puVar4[0x1c7c] = puVar4[-0x210];
  puVar4[0x1c79] = puVar4[-0x20f];
  puVar4[0x1c7a] = puVar4[-0x20e];
  puVar4[0x1c77] = puVar4[-0x20d];
  puVar4[0x1c78] = puVar4[-0x20c];
  puVar4[0x1c76] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x1c73) = extraout_XMM0_Da_x00144;
  *(undefined4 *)((long)puVar4 + 0xe39c) = extraout_XMM0_Db_x00144;
  *(undefined4 *)(puVar4 + 0x1c74) = extraout_XMM0_Dc_x00144;
  *(undefined4 *)((long)puVar4 + 0xe3a4) = extraout_XMM0_Dd_x00144;
  uVar2 = ((undefined8 *)puVar4[0x1c76])[1];
  puVar4[-0x209] = *(undefined8 *)puVar4[0x1c76];
  puVar4[-0x208] = uVar2;
  puVar4[-0x346] = 0x8f1844;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x20b) = extraout_XMM0_Da_x00145;
  *(undefined4 *)((long)puVar4 + -0x1054) = extraout_XMM0_Db_x00145;
  *(undefined4 *)(puVar4 + -0x20a) = extraout_XMM0_Dc_x00145;
  *(undefined4 *)((long)puVar4 + -0x104c) = extraout_XMM0_Dd_x00145;
  puVar4[-0x346] = 0x8f1869;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f1889;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1c71) = extraout_XMM0_Da_x00146;
  *(undefined4 *)((long)puVar4 + 0xe38c) = extraout_XMM0_Db_x00146;
  *(undefined4 *)(puVar4 + 0x1c72) = extraout_XMM0_Dc_x00146;
  *(undefined4 *)((long)puVar4 + 0xe394) = extraout_XMM0_Dd_x00146;
  puVar4[-0x346] = 0x8f189e;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x207) = extraout_XMM0_Da_x00147;
  *(undefined4 *)((long)puVar4 + -0x1034) = extraout_XMM0_Db_x00147;
  *(undefined4 *)(puVar4 + -0x206) = extraout_XMM0_Dc_x00147;
  *(undefined4 *)((long)puVar4 + -0x102c) = extraout_XMM0_Dd_x00147;
  puVar4[-0x346] = 0x8f18c3;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f18d3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1c6f) = extraout_XMM0_Da_x00148;
  *(undefined4 *)((long)puVar4 + 0xe37c) = extraout_XMM0_Db_x00148;
  *(undefined4 *)(puVar4 + 0x1c70) = extraout_XMM0_Dc_x00148;
  *(undefined4 *)((long)puVar4 + 0xe384) = extraout_XMM0_Dd_x00148;
  puVar4[-0x346] = 0x8f18f3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1c7e];
  *puVar1 = extraout_XMM0_Da_x00149;
  puVar1[1] = extraout_XMM0_Db_x00149;
  puVar1[2] = extraout_XMM0_Dc_x00149;
  puVar1[3] = extraout_XMM0_Dd_x00149;
  puVar4[-0x346] = 0x8f1913;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1c76];
  *puVar1 = extraout_XMM0_Da_x00150;
  puVar1[1] = extraout_XMM0_Db_x00150;
  puVar1[2] = extraout_XMM0_Dc_x00150;
  puVar1[3] = extraout_XMM0_Dd_x00150;
  puVar4[-0x1ff] = puVar4[0x1dfd];
  puVar4[-0x1fe] = puVar4[0x1dfe];
  puVar4[-0x1fd] = puVar4[0x1dfb];
  puVar4[-0x1fc] = puVar4[0x1dfc];
  puVar4[-0x1fb] = puVar4[0x1df9];
  puVar4[-0x1fa] = puVar4[0x1dfa];
  puVar4[-0x1f9] = puVar4[0x1df5];
  puVar4[-0x1f8] = puVar4[0x1df6];
  puVar4[-0x1f7] = puVar4[0x1df3];
  puVar4[-0x1f6] = puVar4[0x1df4];
  puVar4[-0x1f5] = puVar4[0x1df1];
  puVar4[-500] = puVar4[0x1df2];
  *(undefined4 *)((long)puVar4 + 0x4254) = 0xe49b69c1;
  puVar4[-0x346] = 0x8f198f;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x201) = extraout_XMM0_Da_x00151;
  *(undefined4 *)((long)puVar4 + -0x1004) = extraout_XMM0_Db_x00151;
  *(undefined4 *)(puVar4 + -0x200) = extraout_XMM0_Dc_x00151;
  *(undefined4 *)((long)puVar4 + -0xffc) = extraout_XMM0_Dd_x00151;
  puVar4[-0x346] = 0x8f19a4;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0x203) = extraout_XMM0_Da_x00152;
  *(undefined4 *)((long)puVar4 + -0x1014) = extraout_XMM0_Db_x00152;
  *(undefined4 *)(puVar4 + -0x202) = extraout_XMM0_Dc_x00152;
  *(undefined4 *)((long)puVar4 + -0x100c) = extraout_XMM0_Dd_x00152;
  puVar4[-0x205] = puVar4[0x1ddb];
  puVar4[-0x204] = puVar4[0x1ddc];
  puVar4[-0x346] = 0x8f19c9;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[0xb68] = puVar4 + 0x1ded;
  puVar4[-0x346] = 0x8f19f1;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f1a01;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1c6d] = puVar4[-0x1ff];
  puVar4[0x1c6e] = puVar4[-0x1fe];
  puVar4[0x1c6b] = puVar4[-0x1fd];
  puVar4[0x1c6c] = puVar4[-0x1fc];
  puVar4[0x1c69] = puVar4[-0x1fb];
  puVar4[0x1c6a] = puVar4[-0x1fa];
  puVar4[0x1c68] = puVar4[0xcb6];
  puVar4[0x1c65] = puVar4[-0x1f9];
  puVar4[0x1c66] = puVar4[-0x1f8];
  puVar4[0x1c63] = puVar4[-0x1f7];
  puVar4[0x1c64] = puVar4[-0x1f6];
  puVar4[0x1c61] = puVar4[-0x1f5];
  puVar4[0x1c62] = puVar4[-500];
  puVar4[0x1c60] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x1c5d) = extraout_XMM0_Da_x00153;
  *(undefined4 *)((long)puVar4 + 0xe2ec) = extraout_XMM0_Db_x00153;
  *(undefined4 *)(puVar4 + 0x1c5e) = extraout_XMM0_Dc_x00153;
  *(undefined4 *)((long)puVar4 + 0xe2f4) = extraout_XMM0_Dd_x00153;
  uVar2 = ((undefined8 *)puVar4[0x1c60])[1];
  puVar4[-0x1f1] = *(undefined8 *)puVar4[0x1c60];
  puVar4[-0x1f0] = uVar2;
  puVar4[-0x346] = 0x8f1aa9;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -499) = extraout_XMM0_Da_x00154;
  *(undefined4 *)((long)puVar4 + -0xf94) = extraout_XMM0_Db_x00154;
  *(undefined4 *)(puVar4 + -0x1f2) = extraout_XMM0_Dc_x00154;
  *(undefined4 *)((long)puVar4 + -0xf8c) = extraout_XMM0_Dd_x00154;
  puVar4[-0x346] = 0x8f1ace;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f1aee;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1c5b) = extraout_XMM0_Da_x00155;
  *(undefined4 *)((long)puVar4 + 0xe2dc) = extraout_XMM0_Db_x00155;
  *(undefined4 *)(puVar4 + 0x1c5c) = extraout_XMM0_Dc_x00155;
  *(undefined4 *)((long)puVar4 + 0xe2e4) = extraout_XMM0_Dd_x00155;
  puVar4[-0x346] = 0x8f1b03;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x1ef) = extraout_XMM0_Da_x00156;
  *(undefined4 *)((long)puVar4 + -0xf74) = extraout_XMM0_Db_x00156;
  *(undefined4 *)(puVar4 + -0x1ee) = extraout_XMM0_Dc_x00156;
  *(undefined4 *)((long)puVar4 + -0xf6c) = extraout_XMM0_Dd_x00156;
  puVar4[-0x346] = 0x8f1b28;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f1b38;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1c59) = extraout_XMM0_Da_x00157;
  *(undefined4 *)((long)puVar4 + 0xe2cc) = extraout_XMM0_Db_x00157;
  *(undefined4 *)(puVar4 + 0x1c5a) = extraout_XMM0_Dc_x00157;
  *(undefined4 *)((long)puVar4 + 0xe2d4) = extraout_XMM0_Dd_x00157;
  puVar4[-0x346] = 0x8f1b58;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1c68];
  *puVar1 = extraout_XMM0_Da_x00158;
  puVar1[1] = extraout_XMM0_Db_x00158;
  puVar1[2] = extraout_XMM0_Dc_x00158;
  puVar1[3] = extraout_XMM0_Dd_x00158;
  puVar4[-0x346] = 0x8f1b78;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1c60];
  *puVar1 = extraout_XMM0_Da_x00159;
  puVar1[1] = extraout_XMM0_Db_x00159;
  puVar1[2] = extraout_XMM0_Dc_x00159;
  puVar1[3] = extraout_XMM0_Dd_x00159;
  puVar4[-0x1e7] = puVar4[0x1def];
  puVar4[-0x1e6] = puVar4[0x1df0];
  puVar4[-0x1e5] = puVar4[0x1dfd];
  puVar4[-0x1e4] = puVar4[0x1dfe];
  puVar4[-0x1e3] = puVar4[0x1dfb];
  puVar4[-0x1e2] = puVar4[0x1dfc];
  puVar4[-0x1e1] = puVar4[0x1df7];
  puVar4[-0x1e0] = puVar4[0x1df8];
  puVar4[-0x1df] = puVar4[0x1df5];
  puVar4[-0x1de] = puVar4[0x1df6];
  puVar4[-0x1dd] = puVar4[0x1df3];
  puVar4[-0x1dc] = puVar4[0x1df4];
  *(undefined4 *)((long)puVar4 + 0x4304) = 0xefbe4786;
  puVar4[-0x346] = 0x8f1bf4;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x1e9) = extraout_XMM0_Da_x00160;
  *(undefined4 *)((long)puVar4 + -0xf44) = extraout_XMM0_Db_x00160;
  *(undefined4 *)(puVar4 + -0x1e8) = extraout_XMM0_Dc_x00160;
  *(undefined4 *)((long)puVar4 + -0xf3c) = extraout_XMM0_Dd_x00160;
  puVar4[-0x346] = 0x8f1c09;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0x1eb) = extraout_XMM0_Da_x00161;
  *(undefined4 *)((long)puVar4 + -0xf54) = extraout_XMM0_Db_x00161;
  *(undefined4 *)(puVar4 + -0x1ea) = extraout_XMM0_Dc_x00161;
  *(undefined4 *)((long)puVar4 + -0xf4c) = extraout_XMM0_Dd_x00161;
  puVar4[-0x1ed] = puVar4[0x1dd9];
  puVar4[-0x1ec] = puVar4[0x1dda];
  puVar4[-0x346] = 0x8f1c2e;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[0xb82] = puVar4 + 0x1deb;
  puVar4[-0x346] = 0x8f1c56;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f1c66;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1c57] = puVar4[-0x1e7];
  puVar4[0x1c58] = puVar4[-0x1e6];
  puVar4[0x1c55] = puVar4[-0x1e5];
  puVar4[0x1c56] = puVar4[-0x1e4];
  puVar4[0x1c53] = puVar4[-0x1e3];
  puVar4[0x1c54] = puVar4[-0x1e2];
  puVar4[0x1c52] = puVar4[0xcd4];
  puVar4[0x1c4f] = puVar4[-0x1e1];
  puVar4[0x1c50] = puVar4[-0x1e0];
  puVar4[0x1c4d] = puVar4[-0x1df];
  puVar4[0x1c4e] = puVar4[-0x1de];
  puVar4[0x1c4b] = puVar4[-0x1dd];
  puVar4[0x1c4c] = puVar4[-0x1dc];
  puVar4[0x1c4a] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x1c47) = extraout_XMM0_Da_x00162;
  *(undefined4 *)((long)puVar4 + 0xe23c) = extraout_XMM0_Db_x00162;
  *(undefined4 *)(puVar4 + 0x1c48) = extraout_XMM0_Dc_x00162;
  *(undefined4 *)((long)puVar4 + 0xe244) = extraout_XMM0_Dd_x00162;
  uVar2 = ((undefined8 *)puVar4[0x1c4a])[1];
  puVar4[-0x1d9] = *(undefined8 *)puVar4[0x1c4a];
  puVar4[-0x1d8] = uVar2;
  puVar4[-0x346] = 0x8f1d0e;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x1db) = extraout_XMM0_Da_x00163;
  *(undefined4 *)((long)puVar4 + -0xed4) = extraout_XMM0_Db_x00163;
  *(undefined4 *)(puVar4 + -0x1da) = extraout_XMM0_Dc_x00163;
  *(undefined4 *)((long)puVar4 + -0xecc) = extraout_XMM0_Dd_x00163;
  puVar4[-0x346] = 0x8f1d33;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f1d53;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1c45) = extraout_XMM0_Da_x00164;
  *(undefined4 *)((long)puVar4 + 0xe22c) = extraout_XMM0_Db_x00164;
  *(undefined4 *)(puVar4 + 0x1c46) = extraout_XMM0_Dc_x00164;
  *(undefined4 *)((long)puVar4 + 0xe234) = extraout_XMM0_Dd_x00164;
  puVar4[-0x346] = 0x8f1d68;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x1d7) = extraout_XMM0_Da_x00165;
  *(undefined4 *)((long)puVar4 + -0xeb4) = extraout_XMM0_Db_x00165;
  *(undefined4 *)(puVar4 + -0x1d6) = extraout_XMM0_Dc_x00165;
  *(undefined4 *)((long)puVar4 + -0xeac) = extraout_XMM0_Dd_x00165;
  puVar4[-0x346] = 0x8f1d8d;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f1d9d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1c43) = extraout_XMM0_Da_x00166;
  *(undefined4 *)((long)puVar4 + 0xe21c) = extraout_XMM0_Db_x00166;
  *(undefined4 *)(puVar4 + 0x1c44) = extraout_XMM0_Dc_x00166;
  *(undefined4 *)((long)puVar4 + 0xe224) = extraout_XMM0_Dd_x00166;
  puVar4[-0x346] = 0x8f1dbd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1c52];
  *puVar1 = extraout_XMM0_Da_x00167;
  puVar1[1] = extraout_XMM0_Db_x00167;
  puVar1[2] = extraout_XMM0_Dc_x00167;
  puVar1[3] = extraout_XMM0_Dd_x00167;
  puVar4[-0x346] = 0x8f1ddd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1c4a];
  *puVar1 = extraout_XMM0_Da_x00168;
  puVar1[1] = extraout_XMM0_Db_x00168;
  puVar1[2] = extraout_XMM0_Dc_x00168;
  puVar1[3] = extraout_XMM0_Dd_x00168;
  puVar4[-0x1cf] = puVar4[0x1df1];
  puVar4[-0x1ce] = puVar4[0x1df2];
  puVar4[-0x1cd] = puVar4[0x1def];
  puVar4[-0x1cc] = puVar4[0x1df0];
  puVar4[-0x1cb] = puVar4[0x1dfd];
  puVar4[-0x1ca] = puVar4[0x1dfe];
  puVar4[-0x1c9] = puVar4[0x1df9];
  puVar4[-0x1c8] = puVar4[0x1dfa];
  puVar4[-0x1c7] = puVar4[0x1df7];
  puVar4[-0x1c6] = puVar4[0x1df8];
  puVar4[-0x1c5] = puVar4[0x1df5];
  puVar4[-0x1c4] = puVar4[0x1df6];
  *(undefined4 *)((long)puVar4 + 0x43c4) = 0xfc19dc6;
  puVar4[-0x346] = 0x8f1e59;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x1d1) = extraout_XMM0_Da_x00169;
  *(undefined4 *)((long)puVar4 + -0xe84) = extraout_XMM0_Db_x00169;
  *(undefined4 *)(puVar4 + -0x1d0) = extraout_XMM0_Dc_x00169;
  *(undefined4 *)((long)puVar4 + -0xe7c) = extraout_XMM0_Dd_x00169;
  puVar4[-0x346] = 0x8f1e6e;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0x1d3) = extraout_XMM0_Da_x00170;
  *(undefined4 *)((long)puVar4 + -0xe94) = extraout_XMM0_Db_x00170;
  *(undefined4 *)(puVar4 + -0x1d2) = extraout_XMM0_Dc_x00170;
  *(undefined4 *)((long)puVar4 + -0xe8c) = extraout_XMM0_Dd_x00170;
  puVar4[-0x1d5] = puVar4[0x1dd7];
  puVar4[-0x1d4] = puVar4[0x1dd8];
  puVar4[-0x346] = 0x8f1e93;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[0xb9c] = puVar4 + 0x1de9;
  puVar4[-0x346] = 0x8f1ebb;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f1ecb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1c41] = puVar4[-0x1cf];
  puVar4[0x1c42] = puVar4[-0x1ce];
  puVar4[0x1c3f] = puVar4[-0x1cd];
  puVar4[0x1c40] = puVar4[-0x1cc];
  puVar4[0x1c3d] = puVar4[-0x1cb];
  puVar4[0x1c3e] = puVar4[-0x1ca];
  puVar4[0x1c3c] = puVar4[0xcf4];
  puVar4[0x1c39] = puVar4[-0x1c9];
  puVar4[0x1c3a] = puVar4[-0x1c8];
  puVar4[0x1c37] = puVar4[-0x1c7];
  puVar4[0x1c38] = puVar4[-0x1c6];
  puVar4[0x1c35] = puVar4[-0x1c5];
  puVar4[0x1c36] = puVar4[-0x1c4];
  puVar4[0x1c34] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x1c31) = extraout_XMM0_Da_x00171;
  *(undefined4 *)((long)puVar4 + 0xe18c) = extraout_XMM0_Db_x00171;
  *(undefined4 *)(puVar4 + 0x1c32) = extraout_XMM0_Dc_x00171;
  *(undefined4 *)((long)puVar4 + 0xe194) = extraout_XMM0_Dd_x00171;
  uVar2 = ((undefined8 *)puVar4[0x1c34])[1];
  puVar4[-0x1c1] = *(undefined8 *)puVar4[0x1c34];
  puVar4[-0x1c0] = uVar2;
  puVar4[-0x346] = 0x8f1f73;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x1c3) = extraout_XMM0_Da_x00172;
  *(undefined4 *)((long)puVar4 + -0xe14) = extraout_XMM0_Db_x00172;
  *(undefined4 *)(puVar4 + -0x1c2) = extraout_XMM0_Dc_x00172;
  *(undefined4 *)((long)puVar4 + -0xe0c) = extraout_XMM0_Dd_x00172;
  puVar4[-0x346] = 0x8f1f98;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f1fb8;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1c2f) = extraout_XMM0_Da_x00173;
  *(undefined4 *)((long)puVar4 + 0xe17c) = extraout_XMM0_Db_x00173;
  *(undefined4 *)(puVar4 + 0x1c30) = extraout_XMM0_Dc_x00173;
  *(undefined4 *)((long)puVar4 + 0xe184) = extraout_XMM0_Dd_x00173;
  puVar4[-0x346] = 0x8f1fcd;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x1bf) = extraout_XMM0_Da_x00174;
  *(undefined4 *)((long)puVar4 + -0xdf4) = extraout_XMM0_Db_x00174;
  *(undefined4 *)(puVar4 + -0x1be) = extraout_XMM0_Dc_x00174;
  *(undefined4 *)((long)puVar4 + -0xdec) = extraout_XMM0_Dd_x00174;
  puVar4[-0x346] = 0x8f1ff2;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f2002;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1c2d) = extraout_XMM0_Da_x00175;
  *(undefined4 *)((long)puVar4 + 0xe16c) = extraout_XMM0_Db_x00175;
  *(undefined4 *)(puVar4 + 0x1c2e) = extraout_XMM0_Dc_x00175;
  *(undefined4 *)((long)puVar4 + 0xe174) = extraout_XMM0_Dd_x00175;
  puVar4[-0x346] = 0x8f2022;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1c3c];
  *puVar1 = extraout_XMM0_Da_x00176;
  puVar1[1] = extraout_XMM0_Db_x00176;
  puVar1[2] = extraout_XMM0_Dc_x00176;
  puVar1[3] = extraout_XMM0_Dd_x00176;
  puVar4[-0x346] = 0x8f2042;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1c34];
  *puVar1 = extraout_XMM0_Da_x00177;
  puVar1[1] = extraout_XMM0_Db_x00177;
  puVar1[2] = extraout_XMM0_Dc_x00177;
  puVar1[3] = extraout_XMM0_Dd_x00177;
  puVar4[-0x1b7] = puVar4[0x1df3];
  puVar4[-0x1b6] = puVar4[0x1df4];
  puVar4[-0x1b5] = puVar4[0x1df1];
  puVar4[-0x1b4] = puVar4[0x1df2];
  puVar4[-0x1b3] = puVar4[0x1def];
  puVar4[-0x1b2] = puVar4[0x1df0];
  puVar4[-0x1b1] = puVar4[0x1dfb];
  puVar4[-0x1b0] = puVar4[0x1dfc];
  puVar4[-0x1af] = puVar4[0x1df9];
  puVar4[-0x1ae] = puVar4[0x1dfa];
  puVar4[-0x1ad] = puVar4[0x1df7];
  puVar4[-0x1ac] = puVar4[0x1df8];
  *(undefined4 *)((long)puVar4 + 0x4484) = 0x240ca1cc;
  puVar4[-0x346] = 0x8f20be;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x1b9) = extraout_XMM0_Da_x00178;
  *(undefined4 *)((long)puVar4 + -0xdc4) = extraout_XMM0_Db_x00178;
  *(undefined4 *)(puVar4 + -0x1b8) = extraout_XMM0_Dc_x00178;
  *(undefined4 *)((long)puVar4 + -0xdbc) = extraout_XMM0_Dd_x00178;
  puVar4[-0x346] = 0x8f20d3;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0x1bb) = extraout_XMM0_Da_x00179;
  *(undefined4 *)((long)puVar4 + -0xdd4) = extraout_XMM0_Db_x00179;
  *(undefined4 *)(puVar4 + -0x1ba) = extraout_XMM0_Dc_x00179;
  *(undefined4 *)((long)puVar4 + -0xdcc) = extraout_XMM0_Dd_x00179;
  puVar4[-0x1bd] = puVar4[0x1dd5];
  puVar4[-0x1bc] = puVar4[0x1dd6];
  puVar4[-0x346] = 0x8f20f8;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[0xbb6] = puVar4 + 0x1de7;
  puVar4[-0x346] = 0x8f2120;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f2130;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1c2b] = puVar4[-0x1b7];
  puVar4[0x1c2c] = puVar4[-0x1b6];
  puVar4[0x1c29] = puVar4[-0x1b5];
  puVar4[0x1c2a] = puVar4[-0x1b4];
  puVar4[0x1c27] = puVar4[-0x1b3];
  puVar4[0x1c28] = puVar4[-0x1b2];
  puVar4[0x1c26] = puVar4[0xd14];
  puVar4[0x1c23] = puVar4[-0x1b1];
  puVar4[0x1c24] = puVar4[-0x1b0];
  puVar4[0x1c21] = puVar4[-0x1af];
  puVar4[0x1c22] = puVar4[-0x1ae];
  puVar4[0x1c1f] = puVar4[-0x1ad];
  puVar4[0x1c20] = puVar4[-0x1ac];
  puVar4[0x1c1e] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x1c1b) = extraout_XMM0_Da_x00180;
  *(undefined4 *)((long)puVar4 + 0xe0dc) = extraout_XMM0_Db_x00180;
  *(undefined4 *)(puVar4 + 0x1c1c) = extraout_XMM0_Dc_x00180;
  *(undefined4 *)((long)puVar4 + 0xe0e4) = extraout_XMM0_Dd_x00180;
  uVar2 = ((undefined8 *)puVar4[0x1c1e])[1];
  puVar4[-0x1a9] = *(undefined8 *)puVar4[0x1c1e];
  puVar4[-0x1a8] = uVar2;
  puVar4[-0x346] = 0x8f21d8;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x1ab) = extraout_XMM0_Da_x00181;
  *(undefined4 *)((long)puVar4 + -0xd54) = extraout_XMM0_Db_x00181;
  *(undefined4 *)(puVar4 + -0x1aa) = extraout_XMM0_Dc_x00181;
  *(undefined4 *)((long)puVar4 + -0xd4c) = extraout_XMM0_Dd_x00181;
  puVar4[-0x346] = 0x8f21fd;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f221d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1c19) = extraout_XMM0_Da_x00182;
  *(undefined4 *)((long)puVar4 + 0xe0cc) = extraout_XMM0_Db_x00182;
  *(undefined4 *)(puVar4 + 0x1c1a) = extraout_XMM0_Dc_x00182;
  *(undefined4 *)((long)puVar4 + 0xe0d4) = extraout_XMM0_Dd_x00182;
  puVar4[-0x346] = 0x8f2232;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x1a7) = extraout_XMM0_Da_x00183;
  *(undefined4 *)((long)puVar4 + -0xd34) = extraout_XMM0_Db_x00183;
  *(undefined4 *)(puVar4 + -0x1a6) = extraout_XMM0_Dc_x00183;
  *(undefined4 *)((long)puVar4 + -0xd2c) = extraout_XMM0_Dd_x00183;
  puVar4[-0x346] = 0x8f2257;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f2267;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1c17) = extraout_XMM0_Da_x00184;
  *(undefined4 *)((long)puVar4 + 0xe0bc) = extraout_XMM0_Db_x00184;
  *(undefined4 *)(puVar4 + 0x1c18) = extraout_XMM0_Dc_x00184;
  *(undefined4 *)((long)puVar4 + 0xe0c4) = extraout_XMM0_Dd_x00184;
  puVar4[-0x346] = 0x8f2287;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1c26];
  *puVar1 = extraout_XMM0_Da_x00185;
  puVar1[1] = extraout_XMM0_Db_x00185;
  puVar1[2] = extraout_XMM0_Dc_x00185;
  puVar1[3] = extraout_XMM0_Dd_x00185;
  puVar4[-0x346] = 0x8f22a7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1c1e];
  *puVar1 = extraout_XMM0_Da_x00186;
  puVar1[1] = extraout_XMM0_Db_x00186;
  puVar1[2] = extraout_XMM0_Dc_x00186;
  puVar1[3] = extraout_XMM0_Dd_x00186;
  puVar4[-0x19f] = puVar4[0x1df5];
  puVar4[-0x19e] = puVar4[0x1df6];
  puVar4[-0x19d] = puVar4[0x1df3];
  puVar4[-0x19c] = puVar4[0x1df4];
  puVar4[-0x19b] = puVar4[0x1df1];
  puVar4[-0x19a] = puVar4[0x1df2];
  puVar4[-0x199] = puVar4[0x1dfd];
  puVar4[-0x198] = puVar4[0x1dfe];
  puVar4[-0x197] = puVar4[0x1dfb];
  puVar4[-0x196] = puVar4[0x1dfc];
  puVar4[-0x195] = puVar4[0x1df9];
  puVar4[-0x194] = puVar4[0x1dfa];
  *(undefined4 *)((long)puVar4 + 0x4544) = 0x2de92c6f;
  puVar4[-0x346] = 0x8f2323;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x1a1) = extraout_XMM0_Da_x00187;
  *(undefined4 *)((long)puVar4 + -0xd04) = extraout_XMM0_Db_x00187;
  *(undefined4 *)(puVar4 + -0x1a0) = extraout_XMM0_Dc_x00187;
  *(undefined4 *)((long)puVar4 + -0xcfc) = extraout_XMM0_Dd_x00187;
  puVar4[-0x346] = 0x8f2338;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0x1a3) = extraout_XMM0_Da_x00188;
  *(undefined4 *)((long)puVar4 + -0xd14) = extraout_XMM0_Db_x00188;
  *(undefined4 *)(puVar4 + -0x1a2) = extraout_XMM0_Dc_x00188;
  *(undefined4 *)((long)puVar4 + -0xd0c) = extraout_XMM0_Dd_x00188;
  puVar4[-0x1a5] = puVar4[0x1dd3];
  puVar4[-0x1a4] = puVar4[0x1dd4];
  puVar4[-0x346] = 0x8f235d;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[0xbd0] = puVar4 + 0x1de5;
  puVar4[-0x346] = 0x8f2385;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f2395;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1c15] = puVar4[-0x19f];
  puVar4[0x1c16] = puVar4[-0x19e];
  puVar4[0x1c13] = puVar4[-0x19d];
  puVar4[0x1c14] = puVar4[-0x19c];
  puVar4[0x1c11] = puVar4[-0x19b];
  puVar4[0x1c12] = puVar4[-0x19a];
  puVar4[0x1c10] = puVar4[0xcae];
  puVar4[0x1c0d] = puVar4[-0x199];
  puVar4[0x1c0e] = puVar4[-0x198];
  puVar4[0x1c0b] = puVar4[-0x197];
  puVar4[0x1c0c] = puVar4[-0x196];
  puVar4[0x1c09] = puVar4[-0x195];
  puVar4[0x1c0a] = puVar4[-0x194];
  puVar4[0x1c08] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x1c05) = extraout_XMM0_Da_x00189;
  *(undefined4 *)((long)puVar4 + 0xe02c) = extraout_XMM0_Db_x00189;
  *(undefined4 *)(puVar4 + 0x1c06) = extraout_XMM0_Dc_x00189;
  *(undefined4 *)((long)puVar4 + 0xe034) = extraout_XMM0_Dd_x00189;
  uVar2 = ((undefined8 *)puVar4[0x1c08])[1];
  puVar4[-0x191] = *(undefined8 *)puVar4[0x1c08];
  puVar4[-400] = uVar2;
  puVar4[-0x346] = 0x8f243d;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x193) = extraout_XMM0_Da_x00190;
  *(undefined4 *)((long)puVar4 + -0xc94) = extraout_XMM0_Db_x00190;
  *(undefined4 *)(puVar4 + -0x192) = extraout_XMM0_Dc_x00190;
  *(undefined4 *)((long)puVar4 + -0xc8c) = extraout_XMM0_Dd_x00190;
  puVar4[-0x346] = 0x8f2462;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f2482;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1c03) = extraout_XMM0_Da_x00191;
  *(undefined4 *)((long)puVar4 + 0xe01c) = extraout_XMM0_Db_x00191;
  *(undefined4 *)(puVar4 + 0x1c04) = extraout_XMM0_Dc_x00191;
  *(undefined4 *)((long)puVar4 + 0xe024) = extraout_XMM0_Dd_x00191;
  puVar4[-0x346] = 0x8f2497;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -399) = extraout_XMM0_Da_x00192;
  *(undefined4 *)((long)puVar4 + -0xc74) = extraout_XMM0_Db_x00192;
  *(undefined4 *)(puVar4 + -0x18e) = extraout_XMM0_Dc_x00192;
  *(undefined4 *)((long)puVar4 + -0xc6c) = extraout_XMM0_Dd_x00192;
  puVar4[-0x346] = 0x8f24bc;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f24cc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1c01) = extraout_XMM0_Da_x00193;
  *(undefined4 *)((long)puVar4 + 0xe00c) = extraout_XMM0_Db_x00193;
  *(undefined4 *)(puVar4 + 0x1c02) = extraout_XMM0_Dc_x00193;
  *(undefined4 *)((long)puVar4 + 0xe014) = extraout_XMM0_Dd_x00193;
  puVar4[-0x346] = 0x8f24ec;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1c10];
  *puVar1 = extraout_XMM0_Da_x00194;
  puVar1[1] = extraout_XMM0_Db_x00194;
  puVar1[2] = extraout_XMM0_Dc_x00194;
  puVar1[3] = extraout_XMM0_Dd_x00194;
  puVar4[-0x346] = 0x8f250c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1c08];
  *puVar1 = extraout_XMM0_Da_x00195;
  puVar1[1] = extraout_XMM0_Db_x00195;
  puVar1[2] = extraout_XMM0_Dc_x00195;
  puVar1[3] = extraout_XMM0_Dd_x00195;
  puVar4[-0x187] = puVar4[0x1df7];
  puVar4[-0x186] = puVar4[0x1df8];
  puVar4[-0x185] = puVar4[0x1df5];
  puVar4[-0x184] = puVar4[0x1df6];
  puVar4[-0x183] = puVar4[0x1df3];
  puVar4[-0x182] = puVar4[0x1df4];
  puVar4[-0x181] = puVar4[0x1def];
  puVar4[-0x180] = puVar4[0x1df0];
  puVar4[-0x17f] = puVar4[0x1dfd];
  puVar4[-0x17e] = puVar4[0x1dfe];
  puVar4[-0x17d] = puVar4[0x1dfb];
  puVar4[-0x17c] = puVar4[0x1dfc];
  *(undefined4 *)((long)puVar4 + 0x4604) = 0x4a7484aa;
  puVar4[-0x346] = 0x8f2588;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x189) = extraout_XMM0_Da_x00196;
  *(undefined4 *)((long)puVar4 + -0xc44) = extraout_XMM0_Db_x00196;
  *(undefined4 *)(puVar4 + -0x188) = extraout_XMM0_Dc_x00196;
  *(undefined4 *)((long)puVar4 + -0xc3c) = extraout_XMM0_Dd_x00196;
  puVar4[-0x346] = 0x8f259d;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0x18b) = extraout_XMM0_Da_x00197;
  *(undefined4 *)((long)puVar4 + -0xc54) = extraout_XMM0_Db_x00197;
  *(undefined4 *)(puVar4 + -0x18a) = extraout_XMM0_Dc_x00197;
  *(undefined4 *)((long)puVar4 + -0xc4c) = extraout_XMM0_Dd_x00197;
  puVar4[-0x18d] = puVar4[0x1dd1];
  puVar4[-0x18c] = puVar4[0x1dd2];
  puVar4[-0x346] = 0x8f25c2;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[0xbea] = puVar4 + 0x1de3;
  puVar4[-0x346] = 0x8f25ea;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f25fa;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1bff] = puVar4[-0x187];
  puVar4[0x1c00] = puVar4[-0x186];
  puVar4[0x1bfd] = puVar4[-0x185];
  puVar4[0x1bfe] = puVar4[-0x184];
  puVar4[0x1bfb] = puVar4[-0x183];
  puVar4[0x1bfc] = puVar4[-0x182];
  puVar4[0x1bfa] = puVar4[0xccc];
  puVar4[0x1bf7] = puVar4[-0x181];
  puVar4[0x1bf8] = puVar4[-0x180];
  puVar4[0x1bf5] = puVar4[-0x17f];
  puVar4[0x1bf6] = puVar4[-0x17e];
  puVar4[0x1bf3] = puVar4[-0x17d];
  puVar4[0x1bf4] = puVar4[-0x17c];
  puVar4[0x1bf2] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x1bef) = extraout_XMM0_Da_x00198;
  *(undefined4 *)((long)puVar4 + 0xdf7c) = extraout_XMM0_Db_x00198;
  *(undefined4 *)(puVar4 + 0x1bf0) = extraout_XMM0_Dc_x00198;
  *(undefined4 *)((long)puVar4 + 0xdf84) = extraout_XMM0_Dd_x00198;
  uVar2 = ((undefined8 *)puVar4[0x1bf2])[1];
  puVar4[-0x179] = *(undefined8 *)puVar4[0x1bf2];
  puVar4[-0x178] = uVar2;
  puVar4[-0x346] = 0x8f26a2;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x17b) = extraout_XMM0_Da_x00199;
  *(undefined4 *)((long)puVar4 + -0xbd4) = extraout_XMM0_Db_x00199;
  *(undefined4 *)(puVar4 + -0x17a) = extraout_XMM0_Dc_x00199;
  *(undefined4 *)((long)puVar4 + -0xbcc) = extraout_XMM0_Dd_x00199;
  puVar4[-0x346] = 0x8f26c7;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f26e7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1bed) = extraout_XMM0_Da_x00200;
  *(undefined4 *)((long)puVar4 + 0xdf6c) = extraout_XMM0_Db_x00200;
  *(undefined4 *)(puVar4 + 0x1bee) = extraout_XMM0_Dc_x00200;
  *(undefined4 *)((long)puVar4 + 0xdf74) = extraout_XMM0_Dd_x00200;
  puVar4[-0x346] = 0x8f26fc;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x177) = extraout_XMM0_Da_x00201;
  *(undefined4 *)((long)puVar4 + -0xbb4) = extraout_XMM0_Db_x00201;
  *(undefined4 *)(puVar4 + -0x176) = extraout_XMM0_Dc_x00201;
  *(undefined4 *)((long)puVar4 + -0xbac) = extraout_XMM0_Dd_x00201;
  puVar4[-0x346] = 0x8f2721;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f2731;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1beb) = extraout_XMM0_Da_x00202;
  *(undefined4 *)((long)puVar4 + 0xdf5c) = extraout_XMM0_Db_x00202;
  *(undefined4 *)(puVar4 + 0x1bec) = extraout_XMM0_Dc_x00202;
  *(undefined4 *)((long)puVar4 + 0xdf64) = extraout_XMM0_Dd_x00202;
  puVar4[-0x346] = 0x8f2751;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1bfa];
  *puVar1 = extraout_XMM0_Da_x00203;
  puVar1[1] = extraout_XMM0_Db_x00203;
  puVar1[2] = extraout_XMM0_Dc_x00203;
  puVar1[3] = extraout_XMM0_Dd_x00203;
  puVar4[-0x346] = 0x8f2771;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1bf2];
  *puVar1 = extraout_XMM0_Da_x00204;
  puVar1[1] = extraout_XMM0_Db_x00204;
  puVar1[2] = extraout_XMM0_Dc_x00204;
  puVar1[3] = extraout_XMM0_Dd_x00204;
  puVar4[-0x16f] = puVar4[0x1df9];
  puVar4[-0x16e] = puVar4[0x1dfa];
  puVar4[-0x16d] = puVar4[0x1df7];
  puVar4[-0x16c] = puVar4[0x1df8];
  puVar4[-0x16b] = puVar4[0x1df5];
  puVar4[-0x16a] = puVar4[0x1df6];
  puVar4[-0x169] = puVar4[0x1df1];
  puVar4[-0x168] = puVar4[0x1df2];
  puVar4[-0x167] = puVar4[0x1def];
  puVar4[-0x166] = puVar4[0x1df0];
  puVar4[-0x165] = puVar4[0x1dfd];
  puVar4[-0x164] = puVar4[0x1dfe];
  *(undefined4 *)((long)puVar4 + 0x46c4) = 0x5cb0a9dc;
  puVar4[-0x346] = 0x8f27ed;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x171) = extraout_XMM0_Da_x00205;
  *(undefined4 *)((long)puVar4 + -0xb84) = extraout_XMM0_Db_x00205;
  *(undefined4 *)(puVar4 + -0x170) = extraout_XMM0_Dc_x00205;
  *(undefined4 *)((long)puVar4 + -0xb7c) = extraout_XMM0_Dd_x00205;
  puVar4[-0x346] = 0x8f2802;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0x173) = extraout_XMM0_Da_x00206;
  *(undefined4 *)((long)puVar4 + -0xb94) = extraout_XMM0_Db_x00206;
  *(undefined4 *)(puVar4 + -0x172) = extraout_XMM0_Dc_x00206;
  *(undefined4 *)((long)puVar4 + -0xb8c) = extraout_XMM0_Dd_x00206;
  puVar4[-0x175] = puVar4[0x1dcf];
  puVar4[-0x174] = puVar4[0x1dd0];
  puVar4[-0x346] = 0x8f2827;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[0xc04] = puVar4 + 0x1de1;
  puVar4[-0x346] = 0x8f284f;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f285f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1be9] = puVar4[-0x16f];
  puVar4[0x1bea] = puVar4[-0x16e];
  puVar4[0x1be7] = puVar4[-0x16d];
  puVar4[0x1be8] = puVar4[-0x16c];
  puVar4[0x1be5] = puVar4[-0x16b];
  puVar4[0x1be6] = puVar4[-0x16a];
  puVar4[0x1be4] = puVar4[0xcec];
  puVar4[0x1be1] = puVar4[-0x169];
  puVar4[0x1be2] = puVar4[-0x168];
  puVar4[0x1bdf] = puVar4[-0x167];
  puVar4[0x1be0] = puVar4[-0x166];
  puVar4[0x1bdd] = puVar4[-0x165];
  puVar4[0x1bde] = puVar4[-0x164];
  puVar4[0x1bdc] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x1bd9) = extraout_XMM0_Da_x00207;
  *(undefined4 *)((long)puVar4 + 0xdecc) = extraout_XMM0_Db_x00207;
  *(undefined4 *)(puVar4 + 0x1bda) = extraout_XMM0_Dc_x00207;
  *(undefined4 *)((long)puVar4 + 0xded4) = extraout_XMM0_Dd_x00207;
  uVar2 = ((undefined8 *)puVar4[0x1bdc])[1];
  puVar4[-0x161] = *(undefined8 *)puVar4[0x1bdc];
  puVar4[-0x160] = uVar2;
  puVar4[-0x346] = 0x8f2907;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x163) = extraout_XMM0_Da_x00208;
  *(undefined4 *)((long)puVar4 + -0xb14) = extraout_XMM0_Db_x00208;
  *(undefined4 *)(puVar4 + -0x162) = extraout_XMM0_Dc_x00208;
  *(undefined4 *)((long)puVar4 + -0xb0c) = extraout_XMM0_Dd_x00208;
  puVar4[-0x346] = 0x8f292c;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f294c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1bd7) = extraout_XMM0_Da_x00209;
  *(undefined4 *)((long)puVar4 + 0xdebc) = extraout_XMM0_Db_x00209;
  *(undefined4 *)(puVar4 + 0x1bd8) = extraout_XMM0_Dc_x00209;
  *(undefined4 *)((long)puVar4 + 0xdec4) = extraout_XMM0_Dd_x00209;
  puVar4[-0x346] = 0x8f2961;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x15f) = extraout_XMM0_Da_x00210;
  *(undefined4 *)((long)puVar4 + -0xaf4) = extraout_XMM0_Db_x00210;
  *(undefined4 *)(puVar4 + -0x15e) = extraout_XMM0_Dc_x00210;
  *(undefined4 *)((long)puVar4 + -0xaec) = extraout_XMM0_Dd_x00210;
  puVar4[-0x346] = 0x8f2986;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f2996;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1bd5) = extraout_XMM0_Da_x00211;
  *(undefined4 *)((long)puVar4 + 0xdeac) = extraout_XMM0_Db_x00211;
  *(undefined4 *)(puVar4 + 0x1bd6) = extraout_XMM0_Dc_x00211;
  *(undefined4 *)((long)puVar4 + 0xdeb4) = extraout_XMM0_Dd_x00211;
  puVar4[-0x346] = 0x8f29b6;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1be4];
  *puVar1 = extraout_XMM0_Da_x00212;
  puVar1[1] = extraout_XMM0_Db_x00212;
  puVar1[2] = extraout_XMM0_Dc_x00212;
  puVar1[3] = extraout_XMM0_Dd_x00212;
  puVar4[-0x346] = 0x8f29d6;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1bdc];
  *puVar1 = extraout_XMM0_Da_x00213;
  puVar1[1] = extraout_XMM0_Db_x00213;
  puVar1[2] = extraout_XMM0_Dc_x00213;
  puVar1[3] = extraout_XMM0_Dd_x00213;
  puVar4[-0x157] = puVar4[0x1dfb];
  puVar4[-0x156] = puVar4[0x1dfc];
  puVar4[-0x155] = puVar4[0x1df9];
  puVar4[-0x154] = puVar4[0x1dfa];
  puVar4[-0x153] = puVar4[0x1df7];
  puVar4[-0x152] = puVar4[0x1df8];
  puVar4[-0x151] = puVar4[0x1df3];
  puVar4[-0x150] = puVar4[0x1df4];
  puVar4[-0x14f] = puVar4[0x1df1];
  puVar4[-0x14e] = puVar4[0x1df2];
  puVar4[-0x14d] = puVar4[0x1def];
  puVar4[-0x14c] = puVar4[0x1df0];
  *(undefined4 *)((long)puVar4 + 0x4794) = 0x76f988da;
  puVar4[-0x346] = 0x8f2a52;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x159) = extraout_XMM0_Da_x00214;
  *(undefined4 *)((long)puVar4 + -0xac4) = extraout_XMM0_Db_x00214;
  *(undefined4 *)(puVar4 + -0x158) = extraout_XMM0_Dc_x00214;
  *(undefined4 *)((long)puVar4 + -0xabc) = extraout_XMM0_Dd_x00214;
  puVar4[-0x346] = 0x8f2a67;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0x15b) = extraout_XMM0_Da_x00215;
  *(undefined4 *)((long)puVar4 + -0xad4) = extraout_XMM0_Db_x00215;
  *(undefined4 *)(puVar4 + -0x15a) = extraout_XMM0_Dc_x00215;
  *(undefined4 *)((long)puVar4 + -0xacc) = extraout_XMM0_Dd_x00215;
  puVar4[-0x15d] = puVar4[0x1ded];
  puVar4[-0x15c] = puVar4[0x1dee];
  puVar4[-0x346] = 0x8f2a8c;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[0xc1e] = puVar4 + 0x1ddf;
  puVar4[-0x346] = 0x8f2ab4;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f2ac4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1bd3] = puVar4[-0x157];
  puVar4[0x1bd4] = puVar4[-0x156];
  puVar4[0x1bd1] = puVar4[-0x155];
  puVar4[0x1bd2] = puVar4[-0x154];
  puVar4[0x1bcf] = puVar4[-0x153];
  puVar4[0x1bd0] = puVar4[-0x152];
  puVar4[0x1bce] = puVar4[0xd0c];
  puVar4[0x1bcb] = puVar4[-0x151];
  puVar4[0x1bcc] = puVar4[-0x150];
  puVar4[0x1bc9] = puVar4[-0x14f];
  puVar4[0x1bca] = puVar4[-0x14e];
  puVar4[0x1bc7] = puVar4[-0x14d];
  puVar4[0x1bc8] = puVar4[-0x14c];
  puVar4[0x1bc6] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x1bc3) = extraout_XMM0_Da_x00216;
  *(undefined4 *)((long)puVar4 + 0xde1c) = extraout_XMM0_Db_x00216;
  *(undefined4 *)(puVar4 + 0x1bc4) = extraout_XMM0_Dc_x00216;
  *(undefined4 *)((long)puVar4 + 0xde24) = extraout_XMM0_Dd_x00216;
  uVar2 = ((undefined8 *)puVar4[0x1bc6])[1];
  puVar4[-0x149] = *(undefined8 *)puVar4[0x1bc6];
  puVar4[-0x148] = uVar2;
  puVar4[-0x346] = 0x8f2b6c;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x14b) = extraout_XMM0_Da_x00217;
  *(undefined4 *)((long)puVar4 + -0xa54) = extraout_XMM0_Db_x00217;
  *(undefined4 *)(puVar4 + -0x14a) = extraout_XMM0_Dc_x00217;
  *(undefined4 *)((long)puVar4 + -0xa4c) = extraout_XMM0_Dd_x00217;
  puVar4[-0x346] = 0x8f2b91;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f2bb1;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1bc1) = extraout_XMM0_Da_x00218;
  *(undefined4 *)((long)puVar4 + 0xde0c) = extraout_XMM0_Db_x00218;
  *(undefined4 *)(puVar4 + 0x1bc2) = extraout_XMM0_Dc_x00218;
  *(undefined4 *)((long)puVar4 + 0xde14) = extraout_XMM0_Dd_x00218;
  puVar4[-0x346] = 0x8f2bc6;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x147) = extraout_XMM0_Da_x00219;
  *(undefined4 *)((long)puVar4 + -0xa34) = extraout_XMM0_Db_x00219;
  *(undefined4 *)(puVar4 + -0x146) = extraout_XMM0_Dc_x00219;
  *(undefined4 *)((long)puVar4 + -0xa2c) = extraout_XMM0_Dd_x00219;
  puVar4[-0x346] = 0x8f2beb;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f2bfb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1bbf) = extraout_XMM0_Da_x00220;
  *(undefined4 *)((long)puVar4 + 0xddfc) = extraout_XMM0_Db_x00220;
  *(undefined4 *)(puVar4 + 0x1bc0) = extraout_XMM0_Dc_x00220;
  *(undefined4 *)((long)puVar4 + 0xde04) = extraout_XMM0_Dd_x00220;
  puVar4[-0x346] = 0x8f2c1b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1bce];
  *puVar1 = extraout_XMM0_Da_x00221;
  puVar1[1] = extraout_XMM0_Db_x00221;
  puVar1[2] = extraout_XMM0_Dc_x00221;
  puVar1[3] = extraout_XMM0_Dd_x00221;
  puVar4[-0x346] = 0x8f2c3b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1bc6];
  *puVar1 = extraout_XMM0_Da_x00222;
  puVar1[1] = extraout_XMM0_Db_x00222;
  puVar1[2] = extraout_XMM0_Dc_x00222;
  puVar1[3] = extraout_XMM0_Dd_x00222;
  puVar4[-0x13f] = puVar4[0x1dfd];
  puVar4[-0x13e] = puVar4[0x1dfe];
  puVar4[-0x13d] = puVar4[0x1dfb];
  puVar4[-0x13c] = puVar4[0x1dfc];
  puVar4[-0x13b] = puVar4[0x1df9];
  puVar4[-0x13a] = puVar4[0x1dfa];
  puVar4[-0x139] = puVar4[0x1df5];
  puVar4[-0x138] = puVar4[0x1df6];
  puVar4[-0x137] = puVar4[0x1df3];
  puVar4[-0x136] = puVar4[0x1df4];
  puVar4[-0x135] = puVar4[0x1df1];
  puVar4[-0x134] = puVar4[0x1df2];
  *(undefined4 *)((long)puVar4 + 0x4864) = 0x983e5152;
  puVar4[-0x346] = 0x8f2cb7;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x141) = extraout_XMM0_Da_x00223;
  *(undefined4 *)((long)puVar4 + -0xa04) = extraout_XMM0_Db_x00223;
  *(undefined4 *)(puVar4 + -0x140) = extraout_XMM0_Dc_x00223;
  *(undefined4 *)((long)puVar4 + -0x9fc) = extraout_XMM0_Dd_x00223;
  puVar4[-0x346] = 0x8f2ccc;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0x143) = extraout_XMM0_Da_x00224;
  *(undefined4 *)((long)puVar4 + -0xa14) = extraout_XMM0_Db_x00224;
  *(undefined4 *)(puVar4 + -0x142) = extraout_XMM0_Dc_x00224;
  *(undefined4 *)((long)puVar4 + -0xa0c) = extraout_XMM0_Dd_x00224;
  puVar4[-0x145] = puVar4[0x1deb];
  puVar4[-0x144] = puVar4[0x1dec];
  puVar4[-0x346] = 0x8f2cf1;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[0xc38] = puVar4 + 0x1ddd;
  puVar4[-0x346] = 0x8f2d19;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f2d29;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1bbd] = puVar4[-0x13f];
  puVar4[0x1bbe] = puVar4[-0x13e];
  puVar4[0x1bbb] = puVar4[-0x13d];
  puVar4[0x1bbc] = puVar4[-0x13c];
  puVar4[0x1bb9] = puVar4[-0x13b];
  puVar4[0x1bba] = puVar4[-0x13a];
  puVar4[0x1bb8] = puVar4[0xcb6];
  puVar4[0x1bb5] = puVar4[-0x139];
  puVar4[0x1bb6] = puVar4[-0x138];
  puVar4[0x1bb3] = puVar4[-0x137];
  puVar4[0x1bb4] = puVar4[-0x136];
  puVar4[0x1bb1] = puVar4[-0x135];
  puVar4[0x1bb2] = puVar4[-0x134];
  puVar4[0x1bb0] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x1bad) = extraout_XMM0_Da_x00225;
  *(undefined4 *)((long)puVar4 + 0xdd6c) = extraout_XMM0_Db_x00225;
  *(undefined4 *)(puVar4 + 0x1bae) = extraout_XMM0_Dc_x00225;
  *(undefined4 *)((long)puVar4 + 0xdd74) = extraout_XMM0_Dd_x00225;
  uVar2 = ((undefined8 *)puVar4[0x1bb0])[1];
  puVar4[-0x131] = *(undefined8 *)puVar4[0x1bb0];
  puVar4[-0x130] = uVar2;
  puVar4[-0x346] = 0x8f2dd1;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x133) = extraout_XMM0_Da_x00226;
  *(undefined4 *)((long)puVar4 + -0x994) = extraout_XMM0_Db_x00226;
  *(undefined4 *)(puVar4 + -0x132) = extraout_XMM0_Dc_x00226;
  *(undefined4 *)((long)puVar4 + -0x98c) = extraout_XMM0_Dd_x00226;
  puVar4[-0x346] = 0x8f2df6;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f2e16;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1bab) = extraout_XMM0_Da_x00227;
  *(undefined4 *)((long)puVar4 + 0xdd5c) = extraout_XMM0_Db_x00227;
  *(undefined4 *)(puVar4 + 0x1bac) = extraout_XMM0_Dc_x00227;
  *(undefined4 *)((long)puVar4 + 0xdd64) = extraout_XMM0_Dd_x00227;
  puVar4[-0x346] = 0x8f2e2b;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x12f) = extraout_XMM0_Da_x00228;
  *(undefined4 *)((long)puVar4 + -0x974) = extraout_XMM0_Db_x00228;
  *(undefined4 *)(puVar4 + -0x12e) = extraout_XMM0_Dc_x00228;
  *(undefined4 *)((long)puVar4 + -0x96c) = extraout_XMM0_Dd_x00228;
  puVar4[-0x346] = 0x8f2e50;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f2e60;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1ba9) = extraout_XMM0_Da_x00229;
  *(undefined4 *)((long)puVar4 + 0xdd4c) = extraout_XMM0_Db_x00229;
  *(undefined4 *)(puVar4 + 0x1baa) = extraout_XMM0_Dc_x00229;
  *(undefined4 *)((long)puVar4 + 0xdd54) = extraout_XMM0_Dd_x00229;
  puVar4[-0x346] = 0x8f2e80;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1bb8];
  *puVar1 = extraout_XMM0_Da_x00230;
  puVar1[1] = extraout_XMM0_Db_x00230;
  puVar1[2] = extraout_XMM0_Dc_x00230;
  puVar1[3] = extraout_XMM0_Dd_x00230;
  puVar4[-0x346] = 0x8f2ea0;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1bb0];
  *puVar1 = extraout_XMM0_Da_x00231;
  puVar1[1] = extraout_XMM0_Db_x00231;
  puVar1[2] = extraout_XMM0_Dc_x00231;
  puVar1[3] = extraout_XMM0_Dd_x00231;
  puVar4[-0x127] = puVar4[0x1def];
  puVar4[-0x126] = puVar4[0x1df0];
  puVar4[-0x125] = puVar4[0x1dfd];
  puVar4[-0x124] = puVar4[0x1dfe];
  puVar4[-0x123] = puVar4[0x1dfb];
  puVar4[-0x122] = puVar4[0x1dfc];
  puVar4[-0x121] = puVar4[0x1df7];
  puVar4[-0x120] = puVar4[0x1df8];
  puVar4[-0x11f] = puVar4[0x1df5];
  puVar4[-0x11e] = puVar4[0x1df6];
  puVar4[-0x11d] = puVar4[0x1df3];
  puVar4[-0x11c] = puVar4[0x1df4];
  *(undefined4 *)((long)puVar4 + 0x4924) = 0xa831c66d;
  puVar4[-0x346] = 0x8f2f1c;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x129) = extraout_XMM0_Da_x00232;
  *(undefined4 *)((long)puVar4 + -0x944) = extraout_XMM0_Db_x00232;
  *(undefined4 *)(puVar4 + -0x128) = extraout_XMM0_Dc_x00232;
  *(undefined4 *)((long)puVar4 + -0x93c) = extraout_XMM0_Dd_x00232;
  puVar4[-0x346] = 0x8f2f31;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -299) = extraout_XMM0_Da_x00233;
  *(undefined4 *)((long)puVar4 + -0x954) = extraout_XMM0_Db_x00233;
  *(undefined4 *)(puVar4 + -0x12a) = extraout_XMM0_Dc_x00233;
  *(undefined4 *)((long)puVar4 + -0x94c) = extraout_XMM0_Dd_x00233;
  puVar4[-0x12d] = puVar4[0x1de9];
  puVar4[-300] = puVar4[0x1dea];
  puVar4[-0x346] = 0x8f2f56;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[0xc52] = puVar4 + 0x1ddb;
  puVar4[-0x346] = 0x8f2f7e;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f2f8e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1ba7] = puVar4[-0x127];
  puVar4[0x1ba8] = puVar4[-0x126];
  puVar4[0x1ba5] = puVar4[-0x125];
  puVar4[0x1ba6] = puVar4[-0x124];
  puVar4[0x1ba3] = puVar4[-0x123];
  puVar4[0x1ba4] = puVar4[-0x122];
  puVar4[0x1ba2] = puVar4[0xcd4];
  puVar4[0x1b9f] = puVar4[-0x121];
  puVar4[0x1ba0] = puVar4[-0x120];
  puVar4[0x1b9d] = puVar4[-0x11f];
  puVar4[0x1b9e] = puVar4[-0x11e];
  puVar4[0x1b9b] = puVar4[-0x11d];
  puVar4[0x1b9c] = puVar4[-0x11c];
  puVar4[0x1b9a] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x1b97) = extraout_XMM0_Da_x00234;
  *(undefined4 *)((long)puVar4 + 0xdcbc) = extraout_XMM0_Db_x00234;
  *(undefined4 *)(puVar4 + 0x1b98) = extraout_XMM0_Dc_x00234;
  *(undefined4 *)((long)puVar4 + 0xdcc4) = extraout_XMM0_Dd_x00234;
  uVar2 = ((undefined8 *)puVar4[0x1b9a])[1];
  puVar4[-0x119] = *(undefined8 *)puVar4[0x1b9a];
  puVar4[-0x118] = uVar2;
  puVar4[-0x346] = 0x8f3036;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x11b) = extraout_XMM0_Da_x00235;
  *(undefined4 *)((long)puVar4 + -0x8d4) = extraout_XMM0_Db_x00235;
  *(undefined4 *)(puVar4 + -0x11a) = extraout_XMM0_Dc_x00235;
  *(undefined4 *)((long)puVar4 + -0x8cc) = extraout_XMM0_Dd_x00235;
  puVar4[-0x346] = 0x8f305b;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f307b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1b95) = extraout_XMM0_Da_x00236;
  *(undefined4 *)((long)puVar4 + 0xdcac) = extraout_XMM0_Db_x00236;
  *(undefined4 *)(puVar4 + 0x1b96) = extraout_XMM0_Dc_x00236;
  *(undefined4 *)((long)puVar4 + 0xdcb4) = extraout_XMM0_Dd_x00236;
  puVar4[-0x346] = 0x8f3090;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x117) = extraout_XMM0_Da_x00237;
  *(undefined4 *)((long)puVar4 + -0x8b4) = extraout_XMM0_Db_x00237;
  *(undefined4 *)(puVar4 + -0x116) = extraout_XMM0_Dc_x00237;
  *(undefined4 *)((long)puVar4 + -0x8ac) = extraout_XMM0_Dd_x00237;
  puVar4[-0x346] = 0x8f30b5;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f30c5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1b93) = extraout_XMM0_Da_x00238;
  *(undefined4 *)((long)puVar4 + 0xdc9c) = extraout_XMM0_Db_x00238;
  *(undefined4 *)(puVar4 + 0x1b94) = extraout_XMM0_Dc_x00238;
  *(undefined4 *)((long)puVar4 + 0xdca4) = extraout_XMM0_Dd_x00238;
  puVar4[-0x346] = 0x8f30e5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1ba2];
  *puVar1 = extraout_XMM0_Da_x00239;
  puVar1[1] = extraout_XMM0_Db_x00239;
  puVar1[2] = extraout_XMM0_Dc_x00239;
  puVar1[3] = extraout_XMM0_Dd_x00239;
  puVar4[-0x346] = 0x8f3105;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1b9a];
  *puVar1 = extraout_XMM0_Da_x00240;
  puVar1[1] = extraout_XMM0_Db_x00240;
  puVar1[2] = extraout_XMM0_Dc_x00240;
  puVar1[3] = extraout_XMM0_Dd_x00240;
  puVar4[-0x10f] = puVar4[0x1df1];
  puVar4[-0x10e] = puVar4[0x1df2];
  puVar4[-0x10d] = puVar4[0x1def];
  puVar4[-0x10c] = puVar4[0x1df0];
  puVar4[-0x10b] = puVar4[0x1dfd];
  puVar4[-0x10a] = puVar4[0x1dfe];
  puVar4[-0x109] = puVar4[0x1df9];
  puVar4[-0x108] = puVar4[0x1dfa];
  puVar4[-0x107] = puVar4[0x1df7];
  puVar4[-0x106] = puVar4[0x1df8];
  puVar4[-0x105] = puVar4[0x1df5];
  puVar4[-0x104] = puVar4[0x1df6];
  *(undefined4 *)((long)puVar4 + 0x49d4) = 0xb00327c8;
  puVar4[-0x346] = 0x8f3181;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x111) = extraout_XMM0_Da_x00241;
  *(undefined4 *)((long)puVar4 + -0x884) = extraout_XMM0_Db_x00241;
  *(undefined4 *)(puVar4 + -0x110) = extraout_XMM0_Dc_x00241;
  *(undefined4 *)((long)puVar4 + -0x87c) = extraout_XMM0_Dd_x00241;
  puVar4[-0x346] = 0x8f3196;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0x113) = extraout_XMM0_Da_x00242;
  *(undefined4 *)((long)puVar4 + -0x894) = extraout_XMM0_Db_x00242;
  *(undefined4 *)(puVar4 + -0x112) = extraout_XMM0_Dc_x00242;
  *(undefined4 *)((long)puVar4 + -0x88c) = extraout_XMM0_Dd_x00242;
  puVar4[-0x115] = puVar4[0x1de7];
  puVar4[-0x114] = puVar4[0x1de8];
  puVar4[-0x346] = 0x8f31bb;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[0xc6c] = puVar4 + 0x1dd9;
  puVar4[-0x346] = 0x8f31e3;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f31f3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1b91] = puVar4[-0x10f];
  puVar4[0x1b92] = puVar4[-0x10e];
  puVar4[0x1b8f] = puVar4[-0x10d];
  puVar4[0x1b90] = puVar4[-0x10c];
  puVar4[0x1b8d] = puVar4[-0x10b];
  puVar4[0x1b8e] = puVar4[-0x10a];
  puVar4[0x1b8c] = puVar4[0xcf4];
  puVar4[0x1b89] = puVar4[-0x109];
  puVar4[0x1b8a] = puVar4[-0x108];
  puVar4[0x1b87] = puVar4[-0x107];
  puVar4[0x1b88] = puVar4[-0x106];
  puVar4[0x1b85] = puVar4[-0x105];
  puVar4[0x1b86] = puVar4[-0x104];
  puVar4[0x1b84] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x1b81) = extraout_XMM0_Da_x00243;
  *(undefined4 *)((long)puVar4 + 0xdc0c) = extraout_XMM0_Db_x00243;
  *(undefined4 *)(puVar4 + 0x1b82) = extraout_XMM0_Dc_x00243;
  *(undefined4 *)((long)puVar4 + 0xdc14) = extraout_XMM0_Dd_x00243;
  uVar2 = ((undefined8 *)puVar4[0x1b84])[1];
  puVar4[-0x101] = *(undefined8 *)puVar4[0x1b84];
  puVar4[-0x100] = uVar2;
  puVar4[-0x346] = 0x8f329b;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x103) = extraout_XMM0_Da_x00244;
  *(undefined4 *)((long)puVar4 + -0x814) = extraout_XMM0_Db_x00244;
  *(undefined4 *)(puVar4 + -0x102) = extraout_XMM0_Dc_x00244;
  *(undefined4 *)((long)puVar4 + -0x80c) = extraout_XMM0_Dd_x00244;
  puVar4[-0x346] = 0x8f32c0;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f32e0;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1b7f) = extraout_XMM0_Da_x00245;
  *(undefined4 *)((long)puVar4 + 0xdbfc) = extraout_XMM0_Db_x00245;
  *(undefined4 *)(puVar4 + 0x1b80) = extraout_XMM0_Dc_x00245;
  *(undefined4 *)((long)puVar4 + 0xdc04) = extraout_XMM0_Dd_x00245;
  puVar4[-0x346] = 0x8f32f5;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0xff) = extraout_XMM0_Da_x00246;
  *(undefined4 *)((long)puVar4 + -0x7f4) = extraout_XMM0_Db_x00246;
  *(undefined4 *)(puVar4 + -0xfe) = extraout_XMM0_Dc_x00246;
  *(undefined4 *)((long)puVar4 + -0x7ec) = extraout_XMM0_Dd_x00246;
  puVar4[-0x346] = 0x8f331a;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f332a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1b7d) = extraout_XMM0_Da_x00247;
  *(undefined4 *)((long)puVar4 + 0xdbec) = extraout_XMM0_Db_x00247;
  *(undefined4 *)(puVar4 + 0x1b7e) = extraout_XMM0_Dc_x00247;
  *(undefined4 *)((long)puVar4 + 0xdbf4) = extraout_XMM0_Dd_x00247;
  puVar4[-0x346] = 0x8f334a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1b8c];
  *puVar1 = extraout_XMM0_Da_x00248;
  puVar1[1] = extraout_XMM0_Db_x00248;
  puVar1[2] = extraout_XMM0_Dc_x00248;
  puVar1[3] = extraout_XMM0_Dd_x00248;
  puVar4[-0x346] = 0x8f336a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1b84];
  *puVar1 = extraout_XMM0_Da_x00249;
  puVar1[1] = extraout_XMM0_Db_x00249;
  puVar1[2] = extraout_XMM0_Dc_x00249;
  puVar1[3] = extraout_XMM0_Dd_x00249;
  puVar4[-0xf7] = puVar4[0x1df3];
  puVar4[-0xf6] = puVar4[0x1df4];
  puVar4[-0xf5] = puVar4[0x1df1];
  puVar4[-0xf4] = puVar4[0x1df2];
  puVar4[-0xf3] = puVar4[0x1def];
  puVar4[-0xf2] = puVar4[0x1df0];
  puVar4[-0xf1] = puVar4[0x1dfb];
  puVar4[-0xf0] = puVar4[0x1dfc];
  puVar4[-0xef] = puVar4[0x1df9];
  puVar4[-0xee] = puVar4[0x1dfa];
  puVar4[-0xed] = puVar4[0x1df7];
  puVar4[-0xec] = puVar4[0x1df8];
  *(undefined4 *)((long)puVar4 + 0x4a84) = 0xbf597fc7;
  puVar4[-0x346] = 0x8f33e6;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0xf9) = extraout_XMM0_Da_x00250;
  *(undefined4 *)((long)puVar4 + -0x7c4) = extraout_XMM0_Db_x00250;
  *(undefined4 *)(puVar4 + -0xf8) = extraout_XMM0_Dc_x00250;
  *(undefined4 *)((long)puVar4 + -0x7bc) = extraout_XMM0_Dd_x00250;
  puVar4[-0x346] = 0x8f33fb;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0xfb) = extraout_XMM0_Da_x00251;
  *(undefined4 *)((long)puVar4 + -0x7d4) = extraout_XMM0_Db_x00251;
  *(undefined4 *)(puVar4 + -0xfa) = extraout_XMM0_Dc_x00251;
  *(undefined4 *)((long)puVar4 + -0x7cc) = extraout_XMM0_Dd_x00251;
  puVar4[-0xfd] = puVar4[0x1de5];
  puVar4[-0xfc] = puVar4[0x1de6];
  puVar4[-0x346] = 0x8f3420;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[0xc86] = puVar4 + 0x1dd7;
  puVar4[-0x346] = 0x8f3448;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f3458;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1b7b] = puVar4[-0xf7];
  puVar4[0x1b7c] = puVar4[-0xf6];
  puVar4[0x1b79] = puVar4[-0xf5];
  puVar4[0x1b7a] = puVar4[-0xf4];
  puVar4[0x1b77] = puVar4[-0xf3];
  puVar4[0x1b78] = puVar4[-0xf2];
  puVar4[0x1b76] = puVar4[0xd14];
  puVar4[0x1b73] = puVar4[-0xf1];
  puVar4[0x1b74] = puVar4[-0xf0];
  puVar4[0x1b71] = puVar4[-0xef];
  puVar4[0x1b72] = puVar4[-0xee];
  puVar4[0x1b6f] = puVar4[-0xed];
  puVar4[0x1b70] = puVar4[-0xec];
  puVar4[0x1b6e] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x1b6b) = extraout_XMM0_Da_x00252;
  *(undefined4 *)((long)puVar4 + 0xdb5c) = extraout_XMM0_Db_x00252;
  *(undefined4 *)(puVar4 + 0x1b6c) = extraout_XMM0_Dc_x00252;
  *(undefined4 *)((long)puVar4 + 0xdb64) = extraout_XMM0_Dd_x00252;
  uVar2 = ((undefined8 *)puVar4[0x1b6e])[1];
  puVar4[-0xe9] = *(undefined8 *)puVar4[0x1b6e];
  puVar4[-0xe8] = uVar2;
  puVar4[-0x346] = 0x8f3500;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0xeb) = extraout_XMM0_Da_x00253;
  *(undefined4 *)((long)puVar4 + -0x754) = extraout_XMM0_Db_x00253;
  *(undefined4 *)(puVar4 + -0xea) = extraout_XMM0_Dc_x00253;
  *(undefined4 *)((long)puVar4 + -0x74c) = extraout_XMM0_Dd_x00253;
  puVar4[-0x346] = 0x8f3525;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f3545;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1b69) = extraout_XMM0_Da_x00254;
  *(undefined4 *)((long)puVar4 + 0xdb4c) = extraout_XMM0_Db_x00254;
  *(undefined4 *)(puVar4 + 0x1b6a) = extraout_XMM0_Dc_x00254;
  *(undefined4 *)((long)puVar4 + 0xdb54) = extraout_XMM0_Dd_x00254;
  puVar4[-0x346] = 0x8f355a;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0xe7) = extraout_XMM0_Da_x00255;
  *(undefined4 *)((long)puVar4 + -0x734) = extraout_XMM0_Db_x00255;
  *(undefined4 *)(puVar4 + -0xe6) = extraout_XMM0_Dc_x00255;
  *(undefined4 *)((long)puVar4 + -0x72c) = extraout_XMM0_Dd_x00255;
  puVar4[-0x346] = 0x8f357f;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f358f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1b67) = extraout_XMM0_Da_x00256;
  *(undefined4 *)((long)puVar4 + 0xdb3c) = extraout_XMM0_Db_x00256;
  *(undefined4 *)(puVar4 + 0x1b68) = extraout_XMM0_Dc_x00256;
  *(undefined4 *)((long)puVar4 + 0xdb44) = extraout_XMM0_Dd_x00256;
  puVar4[-0x346] = 0x8f35af;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1b76];
  *puVar1 = extraout_XMM0_Da_x00257;
  puVar1[1] = extraout_XMM0_Db_x00257;
  puVar1[2] = extraout_XMM0_Dc_x00257;
  puVar1[3] = extraout_XMM0_Dd_x00257;
  puVar4[-0x346] = 0x8f35cf;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1b6e];
  *puVar1 = extraout_XMM0_Da_x00258;
  puVar1[1] = extraout_XMM0_Db_x00258;
  puVar1[2] = extraout_XMM0_Dc_x00258;
  puVar1[3] = extraout_XMM0_Dd_x00258;
  puVar4[-0xdf] = puVar4[0x1df5];
  puVar4[-0xde] = puVar4[0x1df6];
  puVar4[-0xdd] = puVar4[0x1df3];
  puVar4[-0xdc] = puVar4[0x1df4];
  puVar4[-0xdb] = puVar4[0x1df1];
  puVar4[-0xda] = puVar4[0x1df2];
  puVar4[-0xd9] = puVar4[0x1dfd];
  puVar4[-0xd8] = puVar4[0x1dfe];
  puVar4[-0xd7] = puVar4[0x1dfb];
  puVar4[-0xd6] = puVar4[0x1dfc];
  puVar4[-0xd5] = puVar4[0x1df9];
  puVar4[-0xd4] = puVar4[0x1dfa];
  *(undefined4 *)((long)puVar4 + 0x4b34) = 0xc6e00bf3;
  puVar4[-0x346] = 0x8f364b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0xe1) = extraout_XMM0_Da_x00259;
  *(undefined4 *)((long)puVar4 + -0x704) = extraout_XMM0_Db_x00259;
  *(undefined4 *)(puVar4 + -0xe0) = extraout_XMM0_Dc_x00259;
  *(undefined4 *)((long)puVar4 + -0x6fc) = extraout_XMM0_Dd_x00259;
  puVar4[-0x346] = 0x8f3660;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0xe3) = extraout_XMM0_Da_x00260;
  *(undefined4 *)((long)puVar4 + -0x714) = extraout_XMM0_Db_x00260;
  *(undefined4 *)(puVar4 + -0xe2) = extraout_XMM0_Dc_x00260;
  *(undefined4 *)((long)puVar4 + -0x70c) = extraout_XMM0_Dd_x00260;
  puVar4[-0xe5] = puVar4[0x1de3];
  puVar4[-0xe4] = puVar4[0x1de4];
  puVar4[-0x346] = 0x8f3685;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[0xca0] = puVar4 + 0x1dd5;
  puVar4[-0x346] = 0x8f36ad;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f36bd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1b65] = puVar4[-0xdf];
  puVar4[0x1b66] = puVar4[-0xde];
  puVar4[0x1b63] = puVar4[-0xdd];
  puVar4[0x1b64] = puVar4[-0xdc];
  puVar4[0x1b61] = puVar4[-0xdb];
  puVar4[0x1b62] = puVar4[-0xda];
  puVar4[0x1b60] = puVar4[0xcae];
  puVar4[0x1b5d] = puVar4[-0xd9];
  puVar4[0x1b5e] = puVar4[-0xd8];
  puVar4[0x1b5b] = puVar4[-0xd7];
  puVar4[0x1b5c] = puVar4[-0xd6];
  puVar4[0x1b59] = puVar4[-0xd5];
  puVar4[0x1b5a] = puVar4[-0xd4];
  puVar4[7000] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x1b55) = extraout_XMM0_Da_x00261;
  *(undefined4 *)((long)puVar4 + 0xdaac) = extraout_XMM0_Db_x00261;
  *(undefined4 *)(puVar4 + 0x1b56) = extraout_XMM0_Dc_x00261;
  *(undefined4 *)((long)puVar4 + 0xdab4) = extraout_XMM0_Dd_x00261;
  uVar2 = ((undefined8 *)puVar4[7000])[1];
  puVar4[-0xd1] = *(undefined8 *)puVar4[7000];
  puVar4[-0xd0] = uVar2;
  puVar4[-0x346] = 0x8f3765;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0xd3) = extraout_XMM0_Da_x00262;
  *(undefined4 *)((long)puVar4 + -0x694) = extraout_XMM0_Db_x00262;
  *(undefined4 *)(puVar4 + -0xd2) = extraout_XMM0_Dc_x00262;
  *(undefined4 *)((long)puVar4 + -0x68c) = extraout_XMM0_Dd_x00262;
  puVar4[-0x346] = 0x8f378a;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f37aa;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1b53) = extraout_XMM0_Da_x00263;
  *(undefined4 *)((long)puVar4 + 0xda9c) = extraout_XMM0_Db_x00263;
  *(undefined4 *)(puVar4 + 0x1b54) = extraout_XMM0_Dc_x00263;
  *(undefined4 *)((long)puVar4 + 0xdaa4) = extraout_XMM0_Dd_x00263;
  puVar4[-0x346] = 0x8f37bf;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0xcf) = extraout_XMM0_Da_x00264;
  *(undefined4 *)((long)puVar4 + -0x674) = extraout_XMM0_Db_x00264;
  *(undefined4 *)(puVar4 + -0xce) = extraout_XMM0_Dc_x00264;
  *(undefined4 *)((long)puVar4 + -0x66c) = extraout_XMM0_Dd_x00264;
  puVar4[-0x346] = 0x8f37e4;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f37f4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1b51) = extraout_XMM0_Da_x00265;
  *(undefined4 *)((long)puVar4 + 0xda8c) = extraout_XMM0_Db_x00265;
  *(undefined4 *)(puVar4 + 0x1b52) = extraout_XMM0_Dc_x00265;
  *(undefined4 *)((long)puVar4 + 0xda94) = extraout_XMM0_Dd_x00265;
  puVar4[-0x346] = 0x8f3814;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1b60];
  *puVar1 = extraout_XMM0_Da_x00266;
  puVar1[1] = extraout_XMM0_Db_x00266;
  puVar1[2] = extraout_XMM0_Dc_x00266;
  puVar1[3] = extraout_XMM0_Dd_x00266;
  puVar4[-0x346] = 0x8f3834;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[7000];
  *puVar1 = extraout_XMM0_Da_x00267;
  puVar1[1] = extraout_XMM0_Db_x00267;
  puVar1[2] = extraout_XMM0_Dc_x00267;
  puVar1[3] = extraout_XMM0_Dd_x00267;
  puVar4[-199] = puVar4[0x1df7];
  puVar4[-0xc6] = puVar4[0x1df8];
  puVar4[-0xc5] = puVar4[0x1df5];
  puVar4[-0xc4] = puVar4[0x1df6];
  puVar4[-0xc3] = puVar4[0x1df3];
  puVar4[-0xc2] = puVar4[0x1df4];
  puVar4[-0xc1] = puVar4[0x1def];
  puVar4[-0xc0] = puVar4[0x1df0];
  puVar4[-0xbf] = puVar4[0x1dfd];
  puVar4[-0xbe] = puVar4[0x1dfe];
  puVar4[-0xbd] = puVar4[0x1dfb];
  puVar4[-0xbc] = puVar4[0x1dfc];
  *(undefined4 *)((long)puVar4 + 0x4be4) = 0xd5a79147;
  puVar4[-0x346] = 0x8f38b0;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0xc9) = extraout_XMM0_Da_x00268;
  *(undefined4 *)((long)puVar4 + -0x644) = extraout_XMM0_Db_x00268;
  *(undefined4 *)(puVar4 + -200) = extraout_XMM0_Dc_x00268;
  *(undefined4 *)((long)puVar4 + -0x63c) = extraout_XMM0_Dd_x00268;
  puVar4[-0x346] = 0x8f38c5;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0xcb) = extraout_XMM0_Da_x00269;
  *(undefined4 *)((long)puVar4 + -0x654) = extraout_XMM0_Db_x00269;
  *(undefined4 *)(puVar4 + -0xca) = extraout_XMM0_Dc_x00269;
  *(undefined4 *)((long)puVar4 + -0x64c) = extraout_XMM0_Dd_x00269;
  puVar4[-0xcd] = puVar4[0x1de1];
  puVar4[-0xcc] = puVar4[0x1de2];
  puVar4[-0x346] = 0x8f38ea;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[0xcbe] = puVar4 + 0x1dd3;
  puVar4[-0x346] = 0x8f3912;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f3922;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1b4f] = puVar4[-199];
  puVar4[0x1b50] = puVar4[-0xc6];
  puVar4[0x1b4d] = puVar4[-0xc5];
  puVar4[0x1b4e] = puVar4[-0xc4];
  puVar4[0x1b4b] = puVar4[-0xc3];
  puVar4[0x1b4c] = puVar4[-0xc2];
  puVar4[0x1b4a] = puVar4[0xccc];
  puVar4[0x1b47] = puVar4[-0xc1];
  puVar4[0x1b48] = puVar4[-0xc0];
  puVar4[0x1b45] = puVar4[-0xbf];
  puVar4[0x1b46] = puVar4[-0xbe];
  puVar4[0x1b43] = puVar4[-0xbd];
  puVar4[0x1b44] = puVar4[-0xbc];
  puVar4[0x1b42] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x1b3f) = extraout_XMM0_Da_x00270;
  *(undefined4 *)((long)puVar4 + 0xd9fc) = extraout_XMM0_Db_x00270;
  *(undefined4 *)(puVar4 + 0x1b40) = extraout_XMM0_Dc_x00270;
  *(undefined4 *)((long)puVar4 + 0xda04) = extraout_XMM0_Dd_x00270;
  uVar2 = ((undefined8 *)puVar4[0x1b42])[1];
  puVar4[-0xb9] = *(undefined8 *)puVar4[0x1b42];
  puVar4[-0xb8] = uVar2;
  puVar4[-0x346] = 0x8f39ca;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0xbb) = extraout_XMM0_Da_x00271;
  *(undefined4 *)((long)puVar4 + -0x5d4) = extraout_XMM0_Db_x00271;
  *(undefined4 *)(puVar4 + -0xba) = extraout_XMM0_Dc_x00271;
  *(undefined4 *)((long)puVar4 + -0x5cc) = extraout_XMM0_Dd_x00271;
  puVar4[-0x346] = 0x8f39ef;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f3a0f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1b3d) = extraout_XMM0_Da_x00272;
  *(undefined4 *)((long)puVar4 + 0xd9ec) = extraout_XMM0_Db_x00272;
  *(undefined4 *)(puVar4 + 0x1b3e) = extraout_XMM0_Dc_x00272;
  *(undefined4 *)((long)puVar4 + 0xd9f4) = extraout_XMM0_Dd_x00272;
  puVar4[-0x346] = 0x8f3a24;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0xb7) = extraout_XMM0_Da_x00273;
  *(undefined4 *)((long)puVar4 + -0x5b4) = extraout_XMM0_Db_x00273;
  *(undefined4 *)(puVar4 + -0xb6) = extraout_XMM0_Dc_x00273;
  *(undefined4 *)((long)puVar4 + -0x5ac) = extraout_XMM0_Dd_x00273;
  puVar4[-0x346] = 0x8f3a49;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f3a59;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1b3b) = extraout_XMM0_Da_x00274;
  *(undefined4 *)((long)puVar4 + 0xd9dc) = extraout_XMM0_Db_x00274;
  *(undefined4 *)(puVar4 + 0x1b3c) = extraout_XMM0_Dc_x00274;
  *(undefined4 *)((long)puVar4 + 0xd9e4) = extraout_XMM0_Dd_x00274;
  puVar4[-0x346] = 0x8f3a79;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1b4a];
  *puVar1 = extraout_XMM0_Da_x00275;
  puVar1[1] = extraout_XMM0_Db_x00275;
  puVar1[2] = extraout_XMM0_Dc_x00275;
  puVar1[3] = extraout_XMM0_Dd_x00275;
  puVar4[-0x346] = 0x8f3a99;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1b42];
  *puVar1 = extraout_XMM0_Da_x00276;
  puVar1[1] = extraout_XMM0_Db_x00276;
  puVar1[2] = extraout_XMM0_Dc_x00276;
  puVar1[3] = extraout_XMM0_Dd_x00276;
  puVar4[-0xaf] = puVar4[0x1df9];
  puVar4[-0xae] = puVar4[0x1dfa];
  puVar4[-0xad] = puVar4[0x1df7];
  puVar4[-0xac] = puVar4[0x1df8];
  puVar4[-0xab] = puVar4[0x1df5];
  puVar4[-0xaa] = puVar4[0x1df6];
  puVar4[-0xa9] = puVar4[0x1df1];
  puVar4[-0xa8] = puVar4[0x1df2];
  puVar4[-0xa7] = puVar4[0x1def];
  puVar4[-0xa6] = puVar4[0x1df0];
  puVar4[-0xa5] = puVar4[0x1dfd];
  puVar4[-0xa4] = puVar4[0x1dfe];
  *(undefined4 *)((long)puVar4 + 0x4c94) = 0x6ca6351;
  puVar4[-0x346] = 0x8f3b15;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0xb1) = extraout_XMM0_Da_x00277;
  *(undefined4 *)((long)puVar4 + -0x584) = extraout_XMM0_Db_x00277;
  *(undefined4 *)(puVar4 + -0xb0) = extraout_XMM0_Dc_x00277;
  *(undefined4 *)((long)puVar4 + -0x57c) = extraout_XMM0_Dd_x00277;
  puVar4[-0x346] = 0x8f3b2a;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0xb3) = extraout_XMM0_Da_x00278;
  *(undefined4 *)((long)puVar4 + -0x594) = extraout_XMM0_Db_x00278;
  *(undefined4 *)(puVar4 + -0xb2) = extraout_XMM0_Dc_x00278;
  *(undefined4 *)((long)puVar4 + -0x58c) = extraout_XMM0_Dd_x00278;
  puVar4[-0xb5] = puVar4[0x1ddf];
  puVar4[-0xb4] = puVar4[0x1de0];
  puVar4[-0x346] = 0x8f3b4f;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[0xb34] = puVar4 + 0x1dd1;
  puVar4[-0x346] = 0x8f3b77;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f3b87;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1b39] = puVar4[-0xaf];
  puVar4[0x1b3a] = puVar4[-0xae];
  puVar4[0x1b37] = puVar4[-0xad];
  puVar4[0x1b38] = puVar4[-0xac];
  puVar4[0x1b35] = puVar4[-0xab];
  puVar4[0x1b36] = puVar4[-0xaa];
  puVar4[0x1b34] = puVar4[0xcec];
  puVar4[0x1b31] = puVar4[-0xa9];
  puVar4[0x1b32] = puVar4[-0xa8];
  puVar4[0x1b2f] = puVar4[-0xa7];
  puVar4[0x1b30] = puVar4[-0xa6];
  puVar4[0x1b2d] = puVar4[-0xa5];
  puVar4[0x1b2e] = puVar4[-0xa4];
  puVar4[0x1b2c] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x1b29) = extraout_XMM0_Da_x00279;
  *(undefined4 *)((long)puVar4 + 0xd94c) = extraout_XMM0_Db_x00279;
  *(undefined4 *)(puVar4 + 0x1b2a) = extraout_XMM0_Dc_x00279;
  *(undefined4 *)((long)puVar4 + 0xd954) = extraout_XMM0_Dd_x00279;
  uVar2 = ((undefined8 *)puVar4[0x1b2c])[1];
  puVar4[-0xa1] = *(undefined8 *)puVar4[0x1b2c];
  puVar4[-0xa0] = uVar2;
  puVar4[-0x346] = 0x8f3c2f;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0xa3) = extraout_XMM0_Da_x00280;
  *(undefined4 *)((long)puVar4 + -0x514) = extraout_XMM0_Db_x00280;
  *(undefined4 *)(puVar4 + -0xa2) = extraout_XMM0_Dc_x00280;
  *(undefined4 *)((long)puVar4 + -0x50c) = extraout_XMM0_Dd_x00280;
  puVar4[-0x346] = 0x8f3c54;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f3c74;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1b27) = extraout_XMM0_Da_x00281;
  *(undefined4 *)((long)puVar4 + 0xd93c) = extraout_XMM0_Db_x00281;
  *(undefined4 *)(puVar4 + 0x1b28) = extraout_XMM0_Dc_x00281;
  *(undefined4 *)((long)puVar4 + 0xd944) = extraout_XMM0_Dd_x00281;
  puVar4[-0x346] = 0x8f3c89;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x9f) = extraout_XMM0_Da_x00282;
  *(undefined4 *)((long)puVar4 + -0x4f4) = extraout_XMM0_Db_x00282;
  *(undefined4 *)(puVar4 + -0x9e) = extraout_XMM0_Dc_x00282;
  *(undefined4 *)((long)puVar4 + -0x4ec) = extraout_XMM0_Dd_x00282;
  puVar4[-0x346] = 0x8f3cae;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f3cbe;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1b25) = extraout_XMM0_Da_x00283;
  *(undefined4 *)((long)puVar4 + 0xd92c) = extraout_XMM0_Db_x00283;
  *(undefined4 *)(puVar4 + 0x1b26) = extraout_XMM0_Dc_x00283;
  *(undefined4 *)((long)puVar4 + 0xd934) = extraout_XMM0_Dd_x00283;
  puVar4[-0x346] = 0x8f3cde;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1b34];
  *puVar1 = extraout_XMM0_Da_x00284;
  puVar1[1] = extraout_XMM0_Db_x00284;
  puVar1[2] = extraout_XMM0_Dc_x00284;
  puVar1[3] = extraout_XMM0_Dd_x00284;
  puVar4[-0x346] = 0x8f3cfe;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1b2c];
  *puVar1 = extraout_XMM0_Da_x00285;
  puVar1[1] = extraout_XMM0_Db_x00285;
  puVar1[2] = extraout_XMM0_Dc_x00285;
  puVar1[3] = extraout_XMM0_Dd_x00285;
  puVar4[-0x97] = puVar4[0x1dfb];
  puVar4[-0x96] = puVar4[0x1dfc];
  puVar4[-0x95] = puVar4[0x1df9];
  puVar4[-0x94] = puVar4[0x1dfa];
  puVar4[-0x93] = puVar4[0x1df7];
  puVar4[-0x92] = puVar4[0x1df8];
  puVar4[-0x91] = puVar4[0x1df3];
  puVar4[-0x90] = puVar4[0x1df4];
  puVar4[-0x8f] = puVar4[0x1df1];
  puVar4[-0x8e] = puVar4[0x1df2];
  puVar4[-0x8d] = puVar4[0x1def];
  puVar4[-0x8c] = puVar4[0x1df0];
  *(undefined4 *)(puVar4 + 0x9ac) = 0x14292967;
  puVar4[-0x346] = 0x8f3d7a;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x99) = extraout_XMM0_Da_x00286;
  *(undefined4 *)((long)puVar4 + -0x4c4) = extraout_XMM0_Db_x00286;
  *(undefined4 *)(puVar4 + -0x98) = extraout_XMM0_Dc_x00286;
  *(undefined4 *)((long)puVar4 + -0x4bc) = extraout_XMM0_Dd_x00286;
  puVar4[-0x346] = 0x8f3d8f;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0x9b) = extraout_XMM0_Da_x00287;
  *(undefined4 *)((long)puVar4 + -0x4d4) = extraout_XMM0_Db_x00287;
  *(undefined4 *)(puVar4 + -0x9a) = extraout_XMM0_Dc_x00287;
  *(undefined4 *)((long)puVar4 + -0x4cc) = extraout_XMM0_Dd_x00287;
  puVar4[-0x9d] = puVar4[0x1ddd];
  puVar4[-0x9c] = puVar4[0x1dde];
  puVar4[-0x346] = 0x8f3db4;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[0xb4e] = puVar4 + 0x1dcf;
  puVar4[-0x346] = 0x8f3ddc;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f3dec;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1b23] = puVar4[-0x97];
  puVar4[0x1b24] = puVar4[-0x96];
  puVar4[0x1b21] = puVar4[-0x95];
  puVar4[0x1b22] = puVar4[-0x94];
  puVar4[0x1b1f] = puVar4[-0x93];
  puVar4[0x1b20] = puVar4[-0x92];
  puVar4[0x1b1e] = puVar4[0xd0c];
  puVar4[0x1b1b] = puVar4[-0x91];
  puVar4[0x1b1c] = puVar4[-0x90];
  puVar4[0x1b19] = puVar4[-0x8f];
  puVar4[0x1b1a] = puVar4[-0x8e];
  puVar4[0x1b17] = puVar4[-0x8d];
  puVar4[0x1b18] = puVar4[-0x8c];
  puVar4[0x1b16] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x1b13) = extraout_XMM0_Da_x00288;
  *(undefined4 *)((long)puVar4 + 0xd89c) = extraout_XMM0_Db_x00288;
  *(undefined4 *)(puVar4 + 0x1b14) = extraout_XMM0_Dc_x00288;
  *(undefined4 *)((long)puVar4 + 0xd8a4) = extraout_XMM0_Dd_x00288;
  uVar2 = ((undefined8 *)puVar4[0x1b16])[1];
  puVar4[-0x89] = *(undefined8 *)puVar4[0x1b16];
  puVar4[-0x88] = uVar2;
  puVar4[-0x346] = 0x8f3e94;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x8b) = extraout_XMM0_Da_x00289;
  *(undefined4 *)((long)puVar4 + -0x454) = extraout_XMM0_Db_x00289;
  *(undefined4 *)(puVar4 + -0x8a) = extraout_XMM0_Dc_x00289;
  *(undefined4 *)((long)puVar4 + -0x44c) = extraout_XMM0_Dd_x00289;
  puVar4[-0x346] = 0x8f3eb9;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f3ed9;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1b11) = extraout_XMM0_Da_x00290;
  *(undefined4 *)((long)puVar4 + 0xd88c) = extraout_XMM0_Db_x00290;
  *(undefined4 *)(puVar4 + 0x1b12) = extraout_XMM0_Dc_x00290;
  *(undefined4 *)((long)puVar4 + 0xd894) = extraout_XMM0_Dd_x00290;
  puVar4[-0x346] = 0x8f3eee;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x87) = extraout_XMM0_Da_x00291;
  *(undefined4 *)((long)puVar4 + -0x434) = extraout_XMM0_Db_x00291;
  *(undefined4 *)(puVar4 + -0x86) = extraout_XMM0_Dc_x00291;
  *(undefined4 *)((long)puVar4 + -0x42c) = extraout_XMM0_Dd_x00291;
  puVar4[-0x346] = 0x8f3f13;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f3f23;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1b0f) = extraout_XMM0_Da_x00292;
  *(undefined4 *)((long)puVar4 + 0xd87c) = extraout_XMM0_Db_x00292;
  *(undefined4 *)(puVar4 + 0x1b10) = extraout_XMM0_Dc_x00292;
  *(undefined4 *)((long)puVar4 + 0xd884) = extraout_XMM0_Dd_x00292;
  puVar4[-0x346] = 0x8f3f43;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1b1e];
  *puVar1 = extraout_XMM0_Da_x00293;
  puVar1[1] = extraout_XMM0_Db_x00293;
  puVar1[2] = extraout_XMM0_Dc_x00293;
  puVar1[3] = extraout_XMM0_Dd_x00293;
  puVar4[-0x346] = 0x8f3f63;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1b16];
  *puVar1 = extraout_XMM0_Da_x00294;
  puVar1[1] = extraout_XMM0_Db_x00294;
  puVar1[2] = extraout_XMM0_Dc_x00294;
  puVar1[3] = extraout_XMM0_Dd_x00294;
  puVar4[-0x7f] = puVar4[0x1dfd];
  puVar4[-0x7e] = puVar4[0x1dfe];
  puVar4[-0x7d] = puVar4[0x1dfb];
  puVar4[-0x7c] = puVar4[0x1dfc];
  puVar4[-0x7b] = puVar4[0x1df9];
  puVar4[-0x7a] = puVar4[0x1dfa];
  puVar4[-0x79] = puVar4[0x1df5];
  puVar4[-0x78] = puVar4[0x1df6];
  puVar4[-0x77] = puVar4[0x1df3];
  puVar4[-0x76] = puVar4[0x1df4];
  puVar4[-0x75] = puVar4[0x1df1];
  puVar4[-0x74] = puVar4[0x1df2];
  *(undefined4 *)((long)puVar4 + 0x4e44) = 0x27b70a85;
  puVar4[-0x346] = 0x8f3fdf;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x81) = extraout_XMM0_Da_x00295;
  *(undefined4 *)((long)puVar4 + -0x404) = extraout_XMM0_Db_x00295;
  *(undefined4 *)(puVar4 + -0x80) = extraout_XMM0_Dc_x00295;
  *(undefined4 *)((long)puVar4 + -0x3fc) = extraout_XMM0_Dd_x00295;
  puVar4[-0x346] = 0x8f3ff4;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0x83) = extraout_XMM0_Da_x00296;
  *(undefined4 *)((long)puVar4 + -0x414) = extraout_XMM0_Db_x00296;
  *(undefined4 *)(puVar4 + -0x82) = extraout_XMM0_Dc_x00296;
  *(undefined4 *)((long)puVar4 + -0x40c) = extraout_XMM0_Dd_x00296;
  puVar4[-0x85] = puVar4[0x1ddb];
  puVar4[-0x84] = puVar4[0x1ddc];
  puVar4[-0x346] = 0x8f4019;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f4039;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f4049;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1b0d] = puVar4[-0x7f];
  puVar4[0x1b0e] = puVar4[-0x7e];
  puVar4[0x1b0b] = puVar4[-0x7d];
  puVar4[0x1b0c] = puVar4[-0x7c];
  puVar4[0x1b09] = puVar4[-0x7b];
  puVar4[0x1b0a] = puVar4[-0x7a];
  puVar4[0x1b08] = puVar4[0xcb6];
  puVar4[0x1b05] = puVar4[-0x79];
  puVar4[0x1b06] = puVar4[-0x78];
  puVar4[0x1b03] = puVar4[-0x77];
  puVar4[0x1b04] = puVar4[-0x76];
  puVar4[0x1b01] = puVar4[-0x75];
  puVar4[0x1b02] = puVar4[-0x74];
  puVar4[0x1b00] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x1afd) = extraout_XMM0_Da_x00297;
  *(undefined4 *)((long)puVar4 + 0xd7ec) = extraout_XMM0_Db_x00297;
  *(undefined4 *)(puVar4 + 0x1afe) = extraout_XMM0_Dc_x00297;
  *(undefined4 *)((long)puVar4 + 0xd7f4) = extraout_XMM0_Dd_x00297;
  uVar2 = ((undefined8 *)puVar4[0x1b00])[1];
  puVar4[-0x71] = *(undefined8 *)puVar4[0x1b00];
  puVar4[-0x70] = uVar2;
  puVar4[-0x346] = 0x8f40f1;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x73) = extraout_XMM0_Da_x00298;
  *(undefined4 *)((long)puVar4 + -0x394) = extraout_XMM0_Db_x00298;
  *(undefined4 *)(puVar4 + -0x72) = extraout_XMM0_Dc_x00298;
  *(undefined4 *)((long)puVar4 + -0x38c) = extraout_XMM0_Dd_x00298;
  puVar4[-0x346] = 0x8f4116;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f4136;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1afb) = extraout_XMM0_Da_x00299;
  *(undefined4 *)((long)puVar4 + 0xd7dc) = extraout_XMM0_Db_x00299;
  *(undefined4 *)(puVar4 + 0x1afc) = extraout_XMM0_Dc_x00299;
  *(undefined4 *)((long)puVar4 + 0xd7e4) = extraout_XMM0_Dd_x00299;
  puVar4[-0x346] = 0x8f414b;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x6f) = extraout_XMM0_Da_x00300;
  *(undefined4 *)((long)puVar4 + -0x374) = extraout_XMM0_Db_x00300;
  *(undefined4 *)(puVar4 + -0x6e) = extraout_XMM0_Dc_x00300;
  *(undefined4 *)((long)puVar4 + -0x36c) = extraout_XMM0_Dd_x00300;
  puVar4[-0x346] = 0x8f4170;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f4180;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1af9) = extraout_XMM0_Da_x00301;
  *(undefined4 *)((long)puVar4 + 0xd7cc) = extraout_XMM0_Db_x00301;
  *(undefined4 *)(puVar4 + 0x1afa) = extraout_XMM0_Dc_x00301;
  *(undefined4 *)((long)puVar4 + 0xd7d4) = extraout_XMM0_Dd_x00301;
  puVar4[-0x346] = 0x8f41a0;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1b08];
  *puVar1 = extraout_XMM0_Da_x00302;
  puVar1[1] = extraout_XMM0_Db_x00302;
  puVar1[2] = extraout_XMM0_Dc_x00302;
  puVar1[3] = extraout_XMM0_Dd_x00302;
  puVar4[-0x346] = 0x8f41c0;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1b00];
  *puVar1 = extraout_XMM0_Da_x00303;
  puVar1[1] = extraout_XMM0_Db_x00303;
  puVar1[2] = extraout_XMM0_Dc_x00303;
  puVar1[3] = extraout_XMM0_Dd_x00303;
  puVar4[-0x67] = puVar4[0x1def];
  puVar4[-0x66] = puVar4[0x1df0];
  puVar4[-0x65] = puVar4[0x1dfd];
  puVar4[-100] = puVar4[0x1dfe];
  puVar4[-99] = puVar4[0x1dfb];
  puVar4[-0x62] = puVar4[0x1dfc];
  puVar4[-0x61] = puVar4[0x1df7];
  puVar4[-0x60] = puVar4[0x1df8];
  puVar4[-0x5f] = puVar4[0x1df5];
  puVar4[-0x5e] = puVar4[0x1df6];
  puVar4[-0x5d] = puVar4[0x1df3];
  puVar4[-0x5c] = puVar4[0x1df4];
  *(undefined4 *)((long)puVar4 + 0x4f14) = 0x2e1b2138;
  puVar4[-0x346] = 0x8f423c;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x69) = extraout_XMM0_Da_x00304;
  *(undefined4 *)((long)puVar4 + -0x344) = extraout_XMM0_Db_x00304;
  *(undefined4 *)(puVar4 + -0x68) = extraout_XMM0_Dc_x00304;
  *(undefined4 *)((long)puVar4 + -0x33c) = extraout_XMM0_Dd_x00304;
  puVar4[-0x346] = 0x8f4251;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0x6b) = extraout_XMM0_Da_x00305;
  *(undefined4 *)((long)puVar4 + -0x354) = extraout_XMM0_Db_x00305;
  *(undefined4 *)(puVar4 + -0x6a) = extraout_XMM0_Dc_x00305;
  *(undefined4 *)((long)puVar4 + -0x34c) = extraout_XMM0_Dd_x00305;
  puVar4[-0x6d] = puVar4[0x1dd9];
  puVar4[-0x6c] = puVar4[0x1dda];
  puVar4[-0x346] = 0x8f4276;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f4296;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f42a6;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1af7] = puVar4[-0x67];
  puVar4[0x1af8] = puVar4[-0x66];
  puVar4[0x1af5] = puVar4[-0x65];
  puVar4[0x1af6] = puVar4[-100];
  puVar4[0x1af3] = puVar4[-99];
  puVar4[0x1af4] = puVar4[-0x62];
  puVar4[0x1af2] = puVar4[0xcd4];
  puVar4[0x1aef] = puVar4[-0x61];
  puVar4[0x1af0] = puVar4[-0x60];
  puVar4[0x1aed] = puVar4[-0x5f];
  puVar4[0x1aee] = puVar4[-0x5e];
  puVar4[0x1aeb] = puVar4[-0x5d];
  puVar4[0x1aec] = puVar4[-0x5c];
  puVar4[0x1aea] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x1ae7) = extraout_XMM0_Da_x00306;
  *(undefined4 *)((long)puVar4 + 0xd73c) = extraout_XMM0_Db_x00306;
  *(undefined4 *)(puVar4 + 0x1ae8) = extraout_XMM0_Dc_x00306;
  *(undefined4 *)((long)puVar4 + 0xd744) = extraout_XMM0_Dd_x00306;
  uVar2 = ((undefined8 *)puVar4[0x1aea])[1];
  puVar4[-0x59] = *(undefined8 *)puVar4[0x1aea];
  puVar4[-0x58] = uVar2;
  puVar4[-0x346] = 0x8f434e;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x5b) = extraout_XMM0_Da_x00307;
  *(undefined4 *)((long)puVar4 + -0x2d4) = extraout_XMM0_Db_x00307;
  *(undefined4 *)(puVar4 + -0x5a) = extraout_XMM0_Dc_x00307;
  *(undefined4 *)((long)puVar4 + -0x2cc) = extraout_XMM0_Dd_x00307;
  puVar4[-0x346] = 0x8f4373;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f4393;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1ae5) = extraout_XMM0_Da_x00308;
  *(undefined4 *)((long)puVar4 + 0xd72c) = extraout_XMM0_Db_x00308;
  *(undefined4 *)(puVar4 + 0x1ae6) = extraout_XMM0_Dc_x00308;
  *(undefined4 *)((long)puVar4 + 0xd734) = extraout_XMM0_Dd_x00308;
  puVar4[-0x346] = 0x8f43a8;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x57) = extraout_XMM0_Da_x00309;
  *(undefined4 *)((long)puVar4 + -0x2b4) = extraout_XMM0_Db_x00309;
  *(undefined4 *)(puVar4 + -0x56) = extraout_XMM0_Dc_x00309;
  *(undefined4 *)((long)puVar4 + -0x2ac) = extraout_XMM0_Dd_x00309;
  puVar4[-0x346] = 0x8f43cd;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f43dd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1ae3) = extraout_XMM0_Da_x00310;
  *(undefined4 *)((long)puVar4 + 0xd71c) = extraout_XMM0_Db_x00310;
  *(undefined4 *)(puVar4 + 0x1ae4) = extraout_XMM0_Dc_x00310;
  *(undefined4 *)((long)puVar4 + 0xd724) = extraout_XMM0_Dd_x00310;
  puVar4[-0x346] = 0x8f43fd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1af2];
  *puVar1 = extraout_XMM0_Da_x00311;
  puVar1[1] = extraout_XMM0_Db_x00311;
  puVar1[2] = extraout_XMM0_Dc_x00311;
  puVar1[3] = extraout_XMM0_Dd_x00311;
  puVar4[-0x346] = 0x8f441d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1aea];
  *puVar1 = extraout_XMM0_Da_x00312;
  puVar1[1] = extraout_XMM0_Db_x00312;
  puVar1[2] = extraout_XMM0_Dc_x00312;
  puVar1[3] = extraout_XMM0_Dd_x00312;
  puVar4[-0x4f] = puVar4[0x1df1];
  puVar4[-0x4e] = puVar4[0x1df2];
  puVar4[-0x4d] = puVar4[0x1def];
  puVar4[-0x4c] = puVar4[0x1df0];
  puVar4[-0x4b] = puVar4[0x1dfd];
  puVar4[-0x4a] = puVar4[0x1dfe];
  puVar4[-0x49] = puVar4[0x1df9];
  puVar4[-0x48] = puVar4[0x1dfa];
  puVar4[-0x47] = puVar4[0x1df7];
  puVar4[-0x46] = puVar4[0x1df8];
  puVar4[-0x45] = puVar4[0x1df5];
  puVar4[-0x44] = puVar4[0x1df6];
  *(undefined4 *)((long)puVar4 + 0x4fe4) = 0x4d2c6dfc;
  puVar4[-0x346] = 0x8f4499;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x51) = extraout_XMM0_Da_x00313;
  *(undefined4 *)((long)puVar4 + -0x284) = extraout_XMM0_Db_x00313;
  *(undefined4 *)(puVar4 + -0x50) = extraout_XMM0_Dc_x00313;
  *(undefined4 *)((long)puVar4 + -0x27c) = extraout_XMM0_Dd_x00313;
  puVar4[-0x346] = 0x8f44ae;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0x53) = extraout_XMM0_Da_x00314;
  *(undefined4 *)((long)puVar4 + -0x294) = extraout_XMM0_Db_x00314;
  *(undefined4 *)(puVar4 + -0x52) = extraout_XMM0_Dc_x00314;
  *(undefined4 *)((long)puVar4 + -0x28c) = extraout_XMM0_Dd_x00314;
  puVar4[-0x55] = puVar4[0x1dd7];
  puVar4[-0x54] = puVar4[0x1dd8];
  puVar4[-0x346] = 0x8f44d3;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f44f3;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f4503;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1ae1] = puVar4[-0x4f];
  puVar4[0x1ae2] = puVar4[-0x4e];
  puVar4[0x1adf] = puVar4[-0x4d];
  puVar4[0x1ae0] = puVar4[-0x4c];
  puVar4[0x1add] = puVar4[-0x4b];
  puVar4[0x1ade] = puVar4[-0x4a];
  puVar4[0x1adc] = puVar4[0xcf4];
  puVar4[0x1ad9] = puVar4[-0x49];
  puVar4[0x1ada] = puVar4[-0x48];
  puVar4[0x1ad7] = puVar4[-0x47];
  puVar4[0x1ad8] = puVar4[-0x46];
  puVar4[0x1ad5] = puVar4[-0x45];
  puVar4[0x1ad6] = puVar4[-0x44];
  puVar4[0x1ad4] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x1ad1) = extraout_XMM0_Da_x00315;
  *(undefined4 *)((long)puVar4 + 0xd68c) = extraout_XMM0_Db_x00315;
  *(undefined4 *)(puVar4 + 0x1ad2) = extraout_XMM0_Dc_x00315;
  *(undefined4 *)((long)puVar4 + 0xd694) = extraout_XMM0_Dd_x00315;
  uVar2 = ((undefined8 *)puVar4[0x1ad4])[1];
  puVar4[-0x41] = *(undefined8 *)puVar4[0x1ad4];
  puVar4[-0x40] = uVar2;
  puVar4[-0x346] = 0x8f45ab;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x43) = extraout_XMM0_Da_x00316;
  *(undefined4 *)((long)puVar4 + -0x214) = extraout_XMM0_Db_x00316;
  *(undefined4 *)(puVar4 + -0x42) = extraout_XMM0_Dc_x00316;
  *(undefined4 *)((long)puVar4 + -0x20c) = extraout_XMM0_Dd_x00316;
  puVar4[-0x346] = 0x8f45d0;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f45f0;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1acf) = extraout_XMM0_Da_x00317;
  *(undefined4 *)((long)puVar4 + 0xd67c) = extraout_XMM0_Db_x00317;
  *(undefined4 *)(puVar4 + 0x1ad0) = extraout_XMM0_Dc_x00317;
  *(undefined4 *)((long)puVar4 + 0xd684) = extraout_XMM0_Dd_x00317;
  puVar4[-0x346] = 0x8f4605;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x3f) = extraout_XMM0_Da_x00318;
  *(undefined4 *)((long)puVar4 + -500) = extraout_XMM0_Db_x00318;
  *(undefined4 *)(puVar4 + -0x3e) = extraout_XMM0_Dc_x00318;
  *(undefined4 *)((long)puVar4 + -0x1ec) = extraout_XMM0_Dd_x00318;
  puVar4[-0x346] = 0x8f462a;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f463a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1acd) = extraout_XMM0_Da_x00319;
  *(undefined4 *)((long)puVar4 + 0xd66c) = extraout_XMM0_Db_x00319;
  *(undefined4 *)(puVar4 + 0x1ace) = extraout_XMM0_Dc_x00319;
  *(undefined4 *)((long)puVar4 + 0xd674) = extraout_XMM0_Dd_x00319;
  puVar4[-0x346] = 0x8f465a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1adc];
  *puVar1 = extraout_XMM0_Da_x00320;
  puVar1[1] = extraout_XMM0_Db_x00320;
  puVar1[2] = extraout_XMM0_Dc_x00320;
  puVar1[3] = extraout_XMM0_Dd_x00320;
  puVar4[-0x346] = 0x8f467a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1ad4];
  *puVar1 = extraout_XMM0_Da_x00321;
  puVar1[1] = extraout_XMM0_Db_x00321;
  puVar1[2] = extraout_XMM0_Dc_x00321;
  puVar1[3] = extraout_XMM0_Dd_x00321;
  puVar4[-0x37] = puVar4[0x1df3];
  puVar4[-0x36] = puVar4[0x1df4];
  puVar4[-0x35] = puVar4[0x1df1];
  puVar4[-0x34] = puVar4[0x1df2];
  puVar4[-0x33] = puVar4[0x1def];
  puVar4[-0x32] = puVar4[0x1df0];
  puVar4[-0x31] = puVar4[0x1dfb];
  puVar4[-0x30] = puVar4[0x1dfc];
  puVar4[-0x2f] = puVar4[0x1df9];
  puVar4[-0x2e] = puVar4[0x1dfa];
  puVar4[-0x2d] = puVar4[0x1df7];
  puVar4[-0x2c] = puVar4[0x1df8];
  *(undefined4 *)((long)puVar4 + 0x50b4) = 0x53380d13;
  puVar4[-0x346] = 0x8f46f6;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x39) = extraout_XMM0_Da_x00322;
  *(undefined4 *)((long)puVar4 + -0x1c4) = extraout_XMM0_Db_x00322;
  *(undefined4 *)(puVar4 + -0x38) = extraout_XMM0_Dc_x00322;
  *(undefined4 *)((long)puVar4 + -0x1bc) = extraout_XMM0_Dd_x00322;
  puVar4[-0x346] = 0x8f470b;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0x3b) = extraout_XMM0_Da_x00323;
  *(undefined4 *)((long)puVar4 + -0x1d4) = extraout_XMM0_Db_x00323;
  *(undefined4 *)(puVar4 + -0x3a) = extraout_XMM0_Dc_x00323;
  *(undefined4 *)((long)puVar4 + -0x1cc) = extraout_XMM0_Dd_x00323;
  puVar4[-0x3d] = puVar4[0x1dd5];
  puVar4[-0x3c] = puVar4[0x1dd6];
  puVar4[-0x346] = 0x8f4730;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f4750;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f4760;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1acb] = puVar4[-0x37];
  puVar4[0x1acc] = puVar4[-0x36];
  puVar4[0x1ac9] = puVar4[-0x35];
  puVar4[0x1aca] = puVar4[-0x34];
  puVar4[0x1ac7] = puVar4[-0x33];
  puVar4[0x1ac8] = puVar4[-0x32];
  puVar4[0x1ac6] = puVar4[0xd14];
  puVar4[0x1ac3] = puVar4[-0x31];
  puVar4[0x1ac4] = puVar4[-0x30];
  puVar4[0x1ac1] = puVar4[-0x2f];
  puVar4[0x1ac2] = puVar4[-0x2e];
  puVar4[0x1abf] = puVar4[-0x2d];
  puVar4[0x1ac0] = puVar4[-0x2c];
  puVar4[0x1abe] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x1abb) = extraout_XMM0_Da_x00324;
  *(undefined4 *)((long)puVar4 + 0xd5dc) = extraout_XMM0_Db_x00324;
  *(undefined4 *)(puVar4 + 0x1abc) = extraout_XMM0_Dc_x00324;
  *(undefined4 *)((long)puVar4 + 0xd5e4) = extraout_XMM0_Dd_x00324;
  uVar2 = ((undefined8 *)puVar4[0x1abe])[1];
  puVar4[-0x29] = *(undefined8 *)puVar4[0x1abe];
  puVar4[-0x28] = uVar2;
  puVar4[-0x346] = 0x8f4808;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x2b) = extraout_XMM0_Da_x00325;
  *(undefined4 *)((long)puVar4 + -0x154) = extraout_XMM0_Db_x00325;
  *(undefined4 *)(puVar4 + -0x2a) = extraout_XMM0_Dc_x00325;
  *(undefined4 *)((long)puVar4 + -0x14c) = extraout_XMM0_Dd_x00325;
  puVar4[-0x346] = 0x8f482d;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f484d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1ab9) = extraout_XMM0_Da_x00326;
  *(undefined4 *)((long)puVar4 + 0xd5cc) = extraout_XMM0_Db_x00326;
  *(undefined4 *)(puVar4 + 0x1aba) = extraout_XMM0_Dc_x00326;
  *(undefined4 *)((long)puVar4 + 0xd5d4) = extraout_XMM0_Dd_x00326;
  puVar4[-0x346] = 0x8f4862;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x27) = extraout_XMM0_Da_x00327;
  *(undefined4 *)((long)puVar4 + -0x134) = extraout_XMM0_Db_x00327;
  *(undefined4 *)(puVar4 + -0x26) = extraout_XMM0_Dc_x00327;
  *(undefined4 *)((long)puVar4 + -300) = extraout_XMM0_Dd_x00327;
  puVar4[-0x346] = 0x8f4887;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f4897;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1ab7) = extraout_XMM0_Da_x00328;
  *(undefined4 *)((long)puVar4 + 0xd5bc) = extraout_XMM0_Db_x00328;
  *(undefined4 *)(puVar4 + 0x1ab8) = extraout_XMM0_Dc_x00328;
  *(undefined4 *)((long)puVar4 + 0xd5c4) = extraout_XMM0_Dd_x00328;
  puVar4[-0x346] = 0x8f48b7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1ac6];
  *puVar1 = extraout_XMM0_Da_x00329;
  puVar1[1] = extraout_XMM0_Db_x00329;
  puVar1[2] = extraout_XMM0_Dc_x00329;
  puVar1[3] = extraout_XMM0_Dd_x00329;
  puVar4[-0x346] = 0x8f48d7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1abe];
  *puVar1 = extraout_XMM0_Da_x00330;
  puVar1[1] = extraout_XMM0_Db_x00330;
  puVar1[2] = extraout_XMM0_Dc_x00330;
  puVar1[3] = extraout_XMM0_Dd_x00330;
  puVar4[-0x1f] = puVar4[0x1df5];
  puVar4[-0x1e] = puVar4[0x1df6];
  puVar4[-0x1d] = puVar4[0x1df3];
  puVar4[-0x1c] = puVar4[0x1df4];
  puVar4[-0x1b] = puVar4[0x1df1];
  puVar4[-0x1a] = puVar4[0x1df2];
  puVar4[-0x19] = puVar4[0x1dfd];
  puVar4[-0x18] = puVar4[0x1dfe];
  puVar4[-0x17] = puVar4[0x1dfb];
  puVar4[-0x16] = puVar4[0x1dfc];
  puVar4[-0x15] = puVar4[0x1df9];
  puVar4[-0x14] = puVar4[0x1dfa];
  *(undefined4 *)((long)puVar4 + 0x5184) = 0x650a7354;
  puVar4[-0x346] = 0x8f4953;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -0x21) = extraout_XMM0_Da_x00331;
  *(undefined4 *)((long)puVar4 + -0x104) = extraout_XMM0_Db_x00331;
  *(undefined4 *)(puVar4 + -0x20) = extraout_XMM0_Dc_x00331;
  *(undefined4 *)((long)puVar4 + -0xfc) = extraout_XMM0_Dd_x00331;
  puVar4[-0x346] = 0x8f4968;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0x23) = extraout_XMM0_Da_x00332;
  *(undefined4 *)((long)puVar4 + -0x114) = extraout_XMM0_Db_x00332;
  *(undefined4 *)(puVar4 + -0x22) = extraout_XMM0_Dc_x00332;
  *(undefined4 *)((long)puVar4 + -0x10c) = extraout_XMM0_Dd_x00332;
  puVar4[-0x25] = puVar4[0x1dd3];
  puVar4[-0x24] = puVar4[0x1dd4];
  puVar4[-0x346] = 0x8f498d;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f49ad;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f49bd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1ab5] = puVar4[-0x1f];
  puVar4[0x1ab6] = puVar4[-0x1e];
  puVar4[0x1ab3] = puVar4[-0x1d];
  puVar4[0x1ab4] = puVar4[-0x1c];
  puVar4[0x1ab1] = puVar4[-0x1b];
  puVar4[0x1ab2] = puVar4[-0x1a];
  puVar4[0x1ab0] = puVar4[0xcae];
  puVar4[0x1aad] = puVar4[-0x19];
  puVar4[0x1aae] = puVar4[-0x18];
  puVar4[0x1aab] = puVar4[-0x17];
  puVar4[0x1aac] = puVar4[-0x16];
  puVar4[0x1aa9] = puVar4[-0x15];
  puVar4[0x1aaa] = puVar4[-0x14];
  puVar4[0x1aa8] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x1aa5) = extraout_XMM0_Da_x00333;
  *(undefined4 *)((long)puVar4 + 0xd52c) = extraout_XMM0_Db_x00333;
  *(undefined4 *)(puVar4 + 0x1aa6) = extraout_XMM0_Dc_x00333;
  *(undefined4 *)((long)puVar4 + 0xd534) = extraout_XMM0_Dd_x00333;
  uVar2 = ((undefined8 *)puVar4[0x1aa8])[1];
  puVar4[-0x11] = *(undefined8 *)puVar4[0x1aa8];
  puVar4[-0x10] = uVar2;
  puVar4[-0x346] = 0x8f4a65;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0x13) = extraout_XMM0_Da_x00334;
  *(undefined4 *)((long)puVar4 + -0x94) = extraout_XMM0_Db_x00334;
  *(undefined4 *)(puVar4 + -0x12) = extraout_XMM0_Dc_x00334;
  *(undefined4 *)((long)puVar4 + -0x8c) = extraout_XMM0_Dd_x00334;
  puVar4[-0x346] = 0x8f4a8a;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f4aaa;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1aa3) = extraout_XMM0_Da_x00335;
  *(undefined4 *)((long)puVar4 + 0xd51c) = extraout_XMM0_Db_x00335;
  *(undefined4 *)(puVar4 + 0x1aa4) = extraout_XMM0_Dc_x00335;
  *(undefined4 *)((long)puVar4 + 0xd524) = extraout_XMM0_Dd_x00335;
  puVar4[-0x346] = 0x8f4abf;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + -0xf) = extraout_XMM0_Da_x00336;
  *(undefined4 *)((long)puVar4 + -0x74) = extraout_XMM0_Db_x00336;
  *(undefined4 *)(puVar4 + -0xe) = extraout_XMM0_Dc_x00336;
  *(undefined4 *)((long)puVar4 + -0x6c) = extraout_XMM0_Dd_x00336;
  puVar4[-0x346] = 0x8f4ae4;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f4af4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1aa1) = extraout_XMM0_Da_x00337;
  *(undefined4 *)((long)puVar4 + 0xd50c) = extraout_XMM0_Db_x00337;
  *(undefined4 *)(puVar4 + 0x1aa2) = extraout_XMM0_Dc_x00337;
  *(undefined4 *)((long)puVar4 + 0xd514) = extraout_XMM0_Dd_x00337;
  puVar4[-0x346] = 0x8f4b14;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1ab0];
  *puVar1 = extraout_XMM0_Da_x00338;
  puVar1[1] = extraout_XMM0_Db_x00338;
  puVar1[2] = extraout_XMM0_Dc_x00338;
  puVar1[3] = extraout_XMM0_Dd_x00338;
  puVar4[-0x346] = 0x8f4b34;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1aa8];
  *puVar1 = extraout_XMM0_Da_x00339;
  puVar1[1] = extraout_XMM0_Db_x00339;
  puVar1[2] = extraout_XMM0_Dc_x00339;
  puVar1[3] = extraout_XMM0_Dd_x00339;
  puVar4[-7] = puVar4[0x1df7];
  puVar4[-6] = puVar4[0x1df8];
  puVar4[-5] = puVar4[0x1df5];
  puVar4[-4] = puVar4[0x1df6];
  puVar4[-3] = puVar4[0x1df3];
  puVar4[-2] = puVar4[0x1df4];
  puVar4[-1] = puVar4[0x1def];
  *puVar4 = puVar4[0x1df0];
  puVar4[1] = puVar4[0x1dfd];
  puVar4[2] = puVar4[0x1dfe];
  puVar4[3] = puVar4[0x1dfb];
  puVar4[4] = puVar4[0x1dfc];
  *(undefined4 *)((long)puVar4 + 0x5254) = 0x766a0abb;
  puVar4[-0x346] = 0x8f4bb0;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + -9) = extraout_XMM0_Da_x00340;
  *(undefined4 *)((long)puVar4 + -0x44) = extraout_XMM0_Db_x00340;
  *(undefined4 *)(puVar4 + -8) = extraout_XMM0_Dc_x00340;
  *(undefined4 *)((long)puVar4 + -0x3c) = extraout_XMM0_Dd_x00340;
  puVar4[-0x346] = 0x8f4bc5;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + -0xb) = extraout_XMM0_Da_x00341;
  *(undefined4 *)((long)puVar4 + -0x54) = extraout_XMM0_Db_x00341;
  *(undefined4 *)(puVar4 + -10) = extraout_XMM0_Dc_x00341;
  *(undefined4 *)((long)puVar4 + -0x4c) = extraout_XMM0_Dd_x00341;
  puVar4[-0xd] = puVar4[0x1dd1];
  puVar4[-0xc] = puVar4[0x1dd2];
  puVar4[-0x346] = 0x8f4bea;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f4c0a;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f4c1a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1a9f] = puVar4[-7];
  puVar4[0x1aa0] = puVar4[-6];
  puVar4[0x1a9d] = puVar4[-5];
  puVar4[0x1a9e] = puVar4[-4];
  puVar4[0x1a9b] = puVar4[-3];
  puVar4[0x1a9c] = puVar4[-2];
  puVar4[0x1a9a] = puVar4[0xccc];
  puVar4[0x1a97] = puVar4[-1];
  puVar4[0x1a98] = *puVar4;
  puVar4[0x1a95] = puVar4[1];
  puVar4[0x1a96] = puVar4[2];
  puVar4[0x1a93] = puVar4[3];
  puVar4[0x1a94] = puVar4[4];
  puVar4[0x1a92] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x1a8f) = extraout_XMM0_Da_x00342;
  *(undefined4 *)((long)puVar4 + 0xd47c) = extraout_XMM0_Db_x00342;
  *(undefined4 *)(puVar4 + 0x1a90) = extraout_XMM0_Dc_x00342;
  *(undefined4 *)((long)puVar4 + 0xd484) = extraout_XMM0_Dd_x00342;
  uVar2 = ((undefined8 *)puVar4[0x1a92])[1];
  puVar4[7] = *(undefined8 *)puVar4[0x1a92];
  puVar4[8] = uVar2;
  puVar4[-0x346] = 0x8f4cc2;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 5) = extraout_XMM0_Da_x00343;
  *(undefined4 *)((long)puVar4 + 0x2c) = extraout_XMM0_Db_x00343;
  *(undefined4 *)(puVar4 + 6) = extraout_XMM0_Dc_x00343;
  *(undefined4 *)((long)puVar4 + 0x34) = extraout_XMM0_Dd_x00343;
  puVar4[-0x346] = 0x8f4ce7;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f4d07;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1a8d) = extraout_XMM0_Da_x00344;
  *(undefined4 *)((long)puVar4 + 0xd46c) = extraout_XMM0_Db_x00344;
  *(undefined4 *)(puVar4 + 0x1a8e) = extraout_XMM0_Dc_x00344;
  *(undefined4 *)((long)puVar4 + 0xd474) = extraout_XMM0_Dd_x00344;
  puVar4[-0x346] = 0x8f4d1c;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 9) = extraout_XMM0_Da_x00345;
  *(undefined4 *)((long)puVar4 + 0x4c) = extraout_XMM0_Db_x00345;
  *(undefined4 *)(puVar4 + 10) = extraout_XMM0_Dc_x00345;
  *(undefined4 *)((long)puVar4 + 0x54) = extraout_XMM0_Dd_x00345;
  puVar4[-0x346] = 0x8f4d41;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f4d51;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1a8b) = extraout_XMM0_Da_x00346;
  *(undefined4 *)((long)puVar4 + 0xd45c) = extraout_XMM0_Db_x00346;
  *(undefined4 *)(puVar4 + 0x1a8c) = extraout_XMM0_Dc_x00346;
  *(undefined4 *)((long)puVar4 + 0xd464) = extraout_XMM0_Dd_x00346;
  puVar4[-0x346] = 0x8f4d71;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1a9a];
  *puVar1 = extraout_XMM0_Da_x00347;
  puVar1[1] = extraout_XMM0_Db_x00347;
  puVar1[2] = extraout_XMM0_Dc_x00347;
  puVar1[3] = extraout_XMM0_Dd_x00347;
  puVar4[-0x346] = 0x8f4d91;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1a92];
  *puVar1 = extraout_XMM0_Da_x00348;
  puVar1[1] = extraout_XMM0_Db_x00348;
  puVar1[2] = extraout_XMM0_Dc_x00348;
  puVar1[3] = extraout_XMM0_Dd_x00348;
  puVar4[0x11] = puVar4[0x1df9];
  puVar4[0x12] = puVar4[0x1dfa];
  puVar4[0x13] = puVar4[0x1df7];
  puVar4[0x14] = puVar4[0x1df8];
  puVar4[0x15] = puVar4[0x1df5];
  puVar4[0x16] = puVar4[0x1df6];
  puVar4[0x17] = puVar4[0x1df1];
  puVar4[0x18] = puVar4[0x1df2];
  puVar4[0x19] = puVar4[0x1def];
  puVar4[0x1a] = puVar4[0x1df0];
  puVar4[0x1b] = puVar4[0x1dfd];
  puVar4[0x1c] = puVar4[0x1dfe];
  *(undefined4 *)((long)puVar4 + 0x5324) = 0x81c2c92e;
  puVar4[-0x346] = 0x8f4e0d;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xf) = extraout_XMM0_Da_x00349;
  *(undefined4 *)((long)puVar4 + 0x7c) = extraout_XMM0_Db_x00349;
  *(undefined4 *)(puVar4 + 0x10) = extraout_XMM0_Dc_x00349;
  *(undefined4 *)((long)puVar4 + 0x84) = extraout_XMM0_Dd_x00349;
  puVar4[-0x346] = 0x8f4e22;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xd) = extraout_XMM0_Da_x00350;
  *(undefined4 *)((long)puVar4 + 0x6c) = extraout_XMM0_Db_x00350;
  *(undefined4 *)(puVar4 + 0xe) = extraout_XMM0_Dc_x00350;
  *(undefined4 *)((long)puVar4 + 0x74) = extraout_XMM0_Dd_x00350;
  puVar4[0xb] = puVar4[0x1dcf];
  puVar4[0xc] = puVar4[0x1dd0];
  puVar4[-0x346] = 0x8f4e47;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f4e67;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f4e77;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1a89] = puVar4[0x11];
  puVar4[0x1a8a] = puVar4[0x12];
  puVar4[0x1a87] = puVar4[0x13];
  puVar4[0x1a88] = puVar4[0x14];
  puVar4[0x1a85] = puVar4[0x15];
  puVar4[0x1a86] = puVar4[0x16];
  puVar4[0x1a84] = puVar4[0xcec];
  puVar4[0x1a81] = puVar4[0x17];
  puVar4[0x1a82] = puVar4[0x18];
  puVar4[0x1a7f] = puVar4[0x19];
  puVar4[0x1a80] = puVar4[0x1a];
  puVar4[0x1a7d] = puVar4[0x1b];
  puVar4[0x1a7e] = puVar4[0x1c];
  puVar4[0x1a7c] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x1a79) = extraout_XMM0_Da_x00351;
  *(undefined4 *)((long)puVar4 + 0xd3cc) = extraout_XMM0_Db_x00351;
  *(undefined4 *)(puVar4 + 0x1a7a) = extraout_XMM0_Dc_x00351;
  *(undefined4 *)((long)puVar4 + 0xd3d4) = extraout_XMM0_Dd_x00351;
  uVar2 = ((undefined8 *)puVar4[0x1a7c])[1];
  puVar4[0x1f] = *(undefined8 *)puVar4[0x1a7c];
  puVar4[0x20] = uVar2;
  puVar4[-0x346] = 0x8f4f1f;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x1d) = extraout_XMM0_Da_x00352;
  *(undefined4 *)((long)puVar4 + 0xec) = extraout_XMM0_Db_x00352;
  *(undefined4 *)(puVar4 + 0x1e) = extraout_XMM0_Dc_x00352;
  *(undefined4 *)((long)puVar4 + 0xf4) = extraout_XMM0_Dd_x00352;
  puVar4[-0x346] = 0x8f4f44;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f4f64;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1a77) = extraout_XMM0_Da_x00353;
  *(undefined4 *)((long)puVar4 + 0xd3bc) = extraout_XMM0_Db_x00353;
  *(undefined4 *)(puVar4 + 0x1a78) = extraout_XMM0_Dc_x00353;
  *(undefined4 *)((long)puVar4 + 0xd3c4) = extraout_XMM0_Dd_x00353;
  puVar4[-0x346] = 0x8f4f79;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x21) = extraout_XMM0_Da_x00354;
  *(undefined4 *)((long)puVar4 + 0x10c) = extraout_XMM0_Db_x00354;
  *(undefined4 *)(puVar4 + 0x22) = extraout_XMM0_Dc_x00354;
  *(undefined4 *)((long)puVar4 + 0x114) = extraout_XMM0_Dd_x00354;
  puVar4[-0x346] = 0x8f4f9e;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f4fae;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1a75) = extraout_XMM0_Da_x00355;
  *(undefined4 *)((long)puVar4 + 0xd3ac) = extraout_XMM0_Db_x00355;
  *(undefined4 *)(puVar4 + 0x1a76) = extraout_XMM0_Dc_x00355;
  *(undefined4 *)((long)puVar4 + 0xd3b4) = extraout_XMM0_Dd_x00355;
  puVar4[-0x346] = 0x8f4fce;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1a84];
  *puVar1 = extraout_XMM0_Da_x00356;
  puVar1[1] = extraout_XMM0_Db_x00356;
  puVar1[2] = extraout_XMM0_Dc_x00356;
  puVar1[3] = extraout_XMM0_Dd_x00356;
  puVar4[-0x346] = 0x8f4fee;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1a7c];
  *puVar1 = extraout_XMM0_Da_x00357;
  puVar1[1] = extraout_XMM0_Db_x00357;
  puVar1[2] = extraout_XMM0_Dc_x00357;
  puVar1[3] = extraout_XMM0_Dd_x00357;
  puVar4[0x29] = puVar4[0x1dfb];
  puVar4[0x2a] = puVar4[0x1dfc];
  puVar4[0x2b] = puVar4[0x1df9];
  puVar4[0x2c] = puVar4[0x1dfa];
  puVar4[0x2d] = puVar4[0x1df7];
  puVar4[0x2e] = puVar4[0x1df8];
  puVar4[0x2f] = puVar4[0x1df3];
  puVar4[0x30] = puVar4[0x1df4];
  puVar4[0x31] = puVar4[0x1df1];
  puVar4[0x32] = puVar4[0x1df2];
  puVar4[0x33] = puVar4[0x1def];
  puVar4[0x34] = puVar4[0x1df0];
  *(undefined4 *)((long)puVar4 + 0x53f4) = 0x92722c85;
  puVar4[-0x346] = 0x8f506a;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x27) = extraout_XMM0_Da_x00358;
  *(undefined4 *)((long)puVar4 + 0x13c) = extraout_XMM0_Db_x00358;
  *(undefined4 *)(puVar4 + 0x28) = extraout_XMM0_Dc_x00358;
  *(undefined4 *)((long)puVar4 + 0x144) = extraout_XMM0_Dd_x00358;
  puVar4[-0x346] = 0x8f507f;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x25) = extraout_XMM0_Da_x00359;
  *(undefined4 *)((long)puVar4 + 300) = extraout_XMM0_Db_x00359;
  *(undefined4 *)(puVar4 + 0x26) = extraout_XMM0_Dc_x00359;
  *(undefined4 *)((long)puVar4 + 0x134) = extraout_XMM0_Dd_x00359;
  puVar4[0x23] = puVar4[0x1ded];
  puVar4[0x24] = puVar4[0x1dee];
  puVar4[-0x346] = 0x8f50a4;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f50c4;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f50d4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1a73] = puVar4[0x29];
  puVar4[0x1a74] = puVar4[0x2a];
  puVar4[0x1a71] = puVar4[0x2b];
  puVar4[0x1a72] = puVar4[0x2c];
  puVar4[0x1a6f] = puVar4[0x2d];
  puVar4[0x1a70] = puVar4[0x2e];
  puVar4[0x1a6e] = puVar4[0xd0c];
  puVar4[0x1a6b] = puVar4[0x2f];
  puVar4[0x1a6c] = puVar4[0x30];
  puVar4[0x1a69] = puVar4[0x31];
  puVar4[0x1a6a] = puVar4[0x32];
  puVar4[0x1a67] = puVar4[0x33];
  puVar4[0x1a68] = puVar4[0x34];
  puVar4[0x1a66] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x1a63) = extraout_XMM0_Da_x00360;
  *(undefined4 *)((long)puVar4 + 0xd31c) = extraout_XMM0_Db_x00360;
  *(undefined4 *)(puVar4 + 0x1a64) = extraout_XMM0_Dc_x00360;
  *(undefined4 *)((long)puVar4 + 0xd324) = extraout_XMM0_Dd_x00360;
  uVar2 = ((undefined8 *)puVar4[0x1a66])[1];
  puVar4[0x37] = *(undefined8 *)puVar4[0x1a66];
  puVar4[0x38] = uVar2;
  puVar4[-0x346] = 0x8f517c;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x35) = extraout_XMM0_Da_x00361;
  *(undefined4 *)((long)puVar4 + 0x1ac) = extraout_XMM0_Db_x00361;
  *(undefined4 *)(puVar4 + 0x36) = extraout_XMM0_Dc_x00361;
  *(undefined4 *)((long)puVar4 + 0x1b4) = extraout_XMM0_Dd_x00361;
  puVar4[-0x346] = 0x8f51a1;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f51c1;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1a61) = extraout_XMM0_Da_x00362;
  *(undefined4 *)((long)puVar4 + 0xd30c) = extraout_XMM0_Db_x00362;
  *(undefined4 *)(puVar4 + 0x1a62) = extraout_XMM0_Dc_x00362;
  *(undefined4 *)((long)puVar4 + 0xd314) = extraout_XMM0_Dd_x00362;
  puVar4[-0x346] = 0x8f51d6;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x39) = extraout_XMM0_Da_x00363;
  *(undefined4 *)((long)puVar4 + 0x1cc) = extraout_XMM0_Db_x00363;
  *(undefined4 *)(puVar4 + 0x3a) = extraout_XMM0_Dc_x00363;
  *(undefined4 *)((long)puVar4 + 0x1d4) = extraout_XMM0_Dd_x00363;
  puVar4[-0x346] = 0x8f51fb;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f520b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1a5f) = extraout_XMM0_Da_x00364;
  *(undefined4 *)((long)puVar4 + 0xd2fc) = extraout_XMM0_Db_x00364;
  *(undefined4 *)(puVar4 + 0x1a60) = extraout_XMM0_Dc_x00364;
  *(undefined4 *)((long)puVar4 + 0xd304) = extraout_XMM0_Dd_x00364;
  puVar4[-0x346] = 0x8f522b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1a6e];
  *puVar1 = extraout_XMM0_Da_x00365;
  puVar1[1] = extraout_XMM0_Db_x00365;
  puVar1[2] = extraout_XMM0_Dc_x00365;
  puVar1[3] = extraout_XMM0_Dd_x00365;
  puVar4[-0x346] = 0x8f524b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1a66];
  *puVar1 = extraout_XMM0_Da_x00366;
  puVar1[1] = extraout_XMM0_Db_x00366;
  puVar1[2] = extraout_XMM0_Dc_x00366;
  puVar1[3] = extraout_XMM0_Dd_x00366;
  puVar4[0x41] = puVar4[0x1dfd];
  puVar4[0x42] = puVar4[0x1dfe];
  puVar4[0x43] = puVar4[0x1dfb];
  puVar4[0x44] = puVar4[0x1dfc];
  puVar4[0x45] = puVar4[0x1df9];
  puVar4[0x46] = puVar4[0x1dfa];
  puVar4[0x47] = puVar4[0x1df5];
  puVar4[0x48] = puVar4[0x1df6];
  puVar4[0x49] = puVar4[0x1df3];
  puVar4[0x4a] = puVar4[0x1df4];
  puVar4[0x4b] = puVar4[0x1df1];
  puVar4[0x4c] = puVar4[0x1df2];
  *(undefined4 *)((long)puVar4 + 0x54c4) = 0xa2bfe8a1;
  puVar4[-0x346] = 0x8f52c7;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x3f) = extraout_XMM0_Da_x00367;
  *(undefined4 *)((long)puVar4 + 0x1fc) = extraout_XMM0_Db_x00367;
  *(undefined4 *)(puVar4 + 0x40) = extraout_XMM0_Dc_x00367;
  *(undefined4 *)((long)puVar4 + 0x204) = extraout_XMM0_Dd_x00367;
  puVar4[-0x346] = 0x8f52dc;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x3d) = extraout_XMM0_Da_x00368;
  *(undefined4 *)((long)puVar4 + 0x1ec) = extraout_XMM0_Db_x00368;
  *(undefined4 *)(puVar4 + 0x3e) = extraout_XMM0_Dc_x00368;
  *(undefined4 *)((long)puVar4 + 500) = extraout_XMM0_Dd_x00368;
  puVar4[0x3b] = puVar4[0x1deb];
  puVar4[0x3c] = puVar4[0x1dec];
  puVar4[-0x346] = 0x8f5301;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f5321;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f5331;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1a5d] = puVar4[0x41];
  puVar4[0x1a5e] = puVar4[0x42];
  puVar4[0x1a5b] = puVar4[0x43];
  puVar4[0x1a5c] = puVar4[0x44];
  puVar4[0x1a59] = puVar4[0x45];
  puVar4[0x1a5a] = puVar4[0x46];
  puVar4[0x1a58] = puVar4[0xcb6];
  puVar4[0x1a55] = puVar4[0x47];
  puVar4[0x1a56] = puVar4[0x48];
  puVar4[0x1a53] = puVar4[0x49];
  puVar4[0x1a54] = puVar4[0x4a];
  puVar4[0x1a51] = puVar4[0x4b];
  puVar4[0x1a52] = puVar4[0x4c];
  puVar4[0x1a50] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x1a4d) = extraout_XMM0_Da_x00369;
  *(undefined4 *)((long)puVar4 + 0xd26c) = extraout_XMM0_Db_x00369;
  *(undefined4 *)(puVar4 + 0x1a4e) = extraout_XMM0_Dc_x00369;
  *(undefined4 *)((long)puVar4 + 0xd274) = extraout_XMM0_Dd_x00369;
  uVar2 = ((undefined8 *)puVar4[0x1a50])[1];
  puVar4[0x4f] = *(undefined8 *)puVar4[0x1a50];
  puVar4[0x50] = uVar2;
  puVar4[-0x346] = 0x8f53d9;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x4d) = extraout_XMM0_Da_x00370;
  *(undefined4 *)((long)puVar4 + 0x26c) = extraout_XMM0_Db_x00370;
  *(undefined4 *)(puVar4 + 0x4e) = extraout_XMM0_Dc_x00370;
  *(undefined4 *)((long)puVar4 + 0x274) = extraout_XMM0_Dd_x00370;
  puVar4[-0x346] = 0x8f53fe;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f541e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1a4b) = extraout_XMM0_Da_x00371;
  *(undefined4 *)((long)puVar4 + 0xd25c) = extraout_XMM0_Db_x00371;
  *(undefined4 *)(puVar4 + 0x1a4c) = extraout_XMM0_Dc_x00371;
  *(undefined4 *)((long)puVar4 + 0xd264) = extraout_XMM0_Dd_x00371;
  puVar4[-0x346] = 0x8f5433;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x51) = extraout_XMM0_Da_x00372;
  *(undefined4 *)((long)puVar4 + 0x28c) = extraout_XMM0_Db_x00372;
  *(undefined4 *)(puVar4 + 0x52) = extraout_XMM0_Dc_x00372;
  *(undefined4 *)((long)puVar4 + 0x294) = extraout_XMM0_Dd_x00372;
  puVar4[-0x346] = 0x8f5458;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f5468;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1a49) = extraout_XMM0_Da_x00373;
  *(undefined4 *)((long)puVar4 + 0xd24c) = extraout_XMM0_Db_x00373;
  *(undefined4 *)(puVar4 + 0x1a4a) = extraout_XMM0_Dc_x00373;
  *(undefined4 *)((long)puVar4 + 0xd254) = extraout_XMM0_Dd_x00373;
  puVar4[-0x346] = 0x8f5488;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1a58];
  *puVar1 = extraout_XMM0_Da_x00374;
  puVar1[1] = extraout_XMM0_Db_x00374;
  puVar1[2] = extraout_XMM0_Dc_x00374;
  puVar1[3] = extraout_XMM0_Dd_x00374;
  puVar4[-0x346] = 0x8f54a8;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1a50];
  *puVar1 = extraout_XMM0_Da_x00375;
  puVar1[1] = extraout_XMM0_Db_x00375;
  puVar1[2] = extraout_XMM0_Dc_x00375;
  puVar1[3] = extraout_XMM0_Dd_x00375;
  puVar4[0x59] = puVar4[0x1def];
  puVar4[0x5a] = puVar4[0x1df0];
  puVar4[0x5b] = puVar4[0x1dfd];
  puVar4[0x5c] = puVar4[0x1dfe];
  puVar4[0x5d] = puVar4[0x1dfb];
  puVar4[0x5e] = puVar4[0x1dfc];
  puVar4[0x5f] = puVar4[0x1df7];
  puVar4[0x60] = puVar4[0x1df8];
  puVar4[0x61] = puVar4[0x1df5];
  puVar4[0x62] = puVar4[0x1df6];
  puVar4[99] = puVar4[0x1df3];
  puVar4[100] = puVar4[0x1df4];
  *(undefined4 *)((long)puVar4 + 0x5594) = 0xa81a664b;
  puVar4[-0x346] = 0x8f5524;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x57) = extraout_XMM0_Da_x00376;
  *(undefined4 *)((long)puVar4 + 700) = extraout_XMM0_Db_x00376;
  *(undefined4 *)(puVar4 + 0x58) = extraout_XMM0_Dc_x00376;
  *(undefined4 *)((long)puVar4 + 0x2c4) = extraout_XMM0_Dd_x00376;
  puVar4[-0x346] = 0x8f5539;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x55) = extraout_XMM0_Da_x00377;
  *(undefined4 *)((long)puVar4 + 0x2ac) = extraout_XMM0_Db_x00377;
  *(undefined4 *)(puVar4 + 0x56) = extraout_XMM0_Dc_x00377;
  *(undefined4 *)((long)puVar4 + 0x2b4) = extraout_XMM0_Dd_x00377;
  puVar4[0x53] = puVar4[0x1de9];
  puVar4[0x54] = puVar4[0x1dea];
  puVar4[-0x346] = 0x8f555e;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f557e;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f558e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1a47] = puVar4[0x59];
  puVar4[0x1a48] = puVar4[0x5a];
  puVar4[0x1a45] = puVar4[0x5b];
  puVar4[0x1a46] = puVar4[0x5c];
  puVar4[0x1a43] = puVar4[0x5d];
  puVar4[0x1a44] = puVar4[0x5e];
  puVar4[0x1a42] = puVar4[0xcd4];
  puVar4[0x1a3f] = puVar4[0x5f];
  puVar4[0x1a40] = puVar4[0x60];
  puVar4[0x1a3d] = puVar4[0x61];
  puVar4[0x1a3e] = puVar4[0x62];
  puVar4[0x1a3b] = puVar4[99];
  puVar4[0x1a3c] = puVar4[100];
  puVar4[0x1a3a] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x1a37) = extraout_XMM0_Da_x00378;
  *(undefined4 *)((long)puVar4 + 0xd1bc) = extraout_XMM0_Db_x00378;
  *(undefined4 *)(puVar4 + 0x1a38) = extraout_XMM0_Dc_x00378;
  *(undefined4 *)((long)puVar4 + 0xd1c4) = extraout_XMM0_Dd_x00378;
  uVar2 = ((undefined8 *)puVar4[0x1a3a])[1];
  puVar4[0x67] = *(undefined8 *)puVar4[0x1a3a];
  puVar4[0x68] = uVar2;
  puVar4[-0x346] = 0x8f5636;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x65) = extraout_XMM0_Da_x00379;
  *(undefined4 *)((long)puVar4 + 0x32c) = extraout_XMM0_Db_x00379;
  *(undefined4 *)(puVar4 + 0x66) = extraout_XMM0_Dc_x00379;
  *(undefined4 *)((long)puVar4 + 0x334) = extraout_XMM0_Dd_x00379;
  puVar4[-0x346] = 0x8f565b;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f567b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1a35) = extraout_XMM0_Da_x00380;
  *(undefined4 *)((long)puVar4 + 0xd1ac) = extraout_XMM0_Db_x00380;
  *(undefined4 *)(puVar4 + 0x1a36) = extraout_XMM0_Dc_x00380;
  *(undefined4 *)((long)puVar4 + 0xd1b4) = extraout_XMM0_Dd_x00380;
  puVar4[-0x346] = 0x8f5690;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x69) = extraout_XMM0_Da_x00381;
  *(undefined4 *)((long)puVar4 + 0x34c) = extraout_XMM0_Db_x00381;
  *(undefined4 *)(puVar4 + 0x6a) = extraout_XMM0_Dc_x00381;
  *(undefined4 *)((long)puVar4 + 0x354) = extraout_XMM0_Dd_x00381;
  puVar4[-0x346] = 0x8f56b5;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f56c5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1a33) = extraout_XMM0_Da_x00382;
  *(undefined4 *)((long)puVar4 + 0xd19c) = extraout_XMM0_Db_x00382;
  *(undefined4 *)(puVar4 + 0x1a34) = extraout_XMM0_Dc_x00382;
  *(undefined4 *)((long)puVar4 + 0xd1a4) = extraout_XMM0_Dd_x00382;
  puVar4[-0x346] = 0x8f56e5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1a42];
  *puVar1 = extraout_XMM0_Da_x00383;
  puVar1[1] = extraout_XMM0_Db_x00383;
  puVar1[2] = extraout_XMM0_Dc_x00383;
  puVar1[3] = extraout_XMM0_Dd_x00383;
  puVar4[-0x346] = 0x8f5705;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1a3a];
  *puVar1 = extraout_XMM0_Da_x00384;
  puVar1[1] = extraout_XMM0_Db_x00384;
  puVar1[2] = extraout_XMM0_Dc_x00384;
  puVar1[3] = extraout_XMM0_Dd_x00384;
  puVar4[0x71] = puVar4[0x1df1];
  puVar4[0x72] = puVar4[0x1df2];
  puVar4[0x73] = puVar4[0x1def];
  puVar4[0x74] = puVar4[0x1df0];
  puVar4[0x75] = puVar4[0x1dfd];
  puVar4[0x76] = puVar4[0x1dfe];
  puVar4[0x77] = puVar4[0x1df9];
  puVar4[0x78] = puVar4[0x1dfa];
  puVar4[0x79] = puVar4[0x1df7];
  puVar4[0x7a] = puVar4[0x1df8];
  puVar4[0x7b] = puVar4[0x1df5];
  puVar4[0x7c] = puVar4[0x1df6];
  *(undefined4 *)((long)puVar4 + 0x5664) = 0xc24b8b70;
  puVar4[-0x346] = 0x8f5781;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x6f) = extraout_XMM0_Da_x00385;
  *(undefined4 *)((long)puVar4 + 0x37c) = extraout_XMM0_Db_x00385;
  *(undefined4 *)(puVar4 + 0x70) = extraout_XMM0_Dc_x00385;
  *(undefined4 *)((long)puVar4 + 900) = extraout_XMM0_Dd_x00385;
  puVar4[-0x346] = 0x8f5796;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x6d) = extraout_XMM0_Da_x00386;
  *(undefined4 *)((long)puVar4 + 0x36c) = extraout_XMM0_Db_x00386;
  *(undefined4 *)(puVar4 + 0x6e) = extraout_XMM0_Dc_x00386;
  *(undefined4 *)((long)puVar4 + 0x374) = extraout_XMM0_Dd_x00386;
  puVar4[0x6b] = puVar4[0x1de7];
  puVar4[0x6c] = puVar4[0x1de8];
  puVar4[-0x346] = 0x8f57bb;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f57db;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f57eb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1a31] = puVar4[0x71];
  puVar4[0x1a32] = puVar4[0x72];
  puVar4[0x1a2f] = puVar4[0x73];
  puVar4[0x1a30] = puVar4[0x74];
  puVar4[0x1a2d] = puVar4[0x75];
  puVar4[0x1a2e] = puVar4[0x76];
  puVar4[0x1a2c] = puVar4[0xcf4];
  puVar4[0x1a29] = puVar4[0x77];
  puVar4[0x1a2a] = puVar4[0x78];
  puVar4[0x1a27] = puVar4[0x79];
  puVar4[0x1a28] = puVar4[0x7a];
  puVar4[0x1a25] = puVar4[0x7b];
  puVar4[0x1a26] = puVar4[0x7c];
  puVar4[0x1a24] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x1a21) = extraout_XMM0_Da_x00387;
  *(undefined4 *)((long)puVar4 + 0xd10c) = extraout_XMM0_Db_x00387;
  *(undefined4 *)(puVar4 + 0x1a22) = extraout_XMM0_Dc_x00387;
  *(undefined4 *)((long)puVar4 + 0xd114) = extraout_XMM0_Dd_x00387;
  uVar2 = ((undefined8 *)puVar4[0x1a24])[1];
  puVar4[0x7f] = *(undefined8 *)puVar4[0x1a24];
  puVar4[0x80] = uVar2;
  puVar4[-0x346] = 0x8f5893;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x7d) = extraout_XMM0_Da_x00388;
  *(undefined4 *)((long)puVar4 + 0x3ec) = extraout_XMM0_Db_x00388;
  *(undefined4 *)(puVar4 + 0x7e) = extraout_XMM0_Dc_x00388;
  *(undefined4 *)((long)puVar4 + 0x3f4) = extraout_XMM0_Dd_x00388;
  puVar4[-0x346] = 0x8f58b8;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f58d8;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1a1f) = extraout_XMM0_Da_x00389;
  *(undefined4 *)((long)puVar4 + 0xd0fc) = extraout_XMM0_Db_x00389;
  *(undefined4 *)(puVar4 + 0x1a20) = extraout_XMM0_Dc_x00389;
  *(undefined4 *)((long)puVar4 + 0xd104) = extraout_XMM0_Dd_x00389;
  puVar4[-0x346] = 0x8f58ed;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x81) = extraout_XMM0_Da_x00390;
  *(undefined4 *)((long)puVar4 + 0x40c) = extraout_XMM0_Db_x00390;
  *(undefined4 *)(puVar4 + 0x82) = extraout_XMM0_Dc_x00390;
  *(undefined4 *)((long)puVar4 + 0x414) = extraout_XMM0_Dd_x00390;
  puVar4[-0x346] = 0x8f5912;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f5922;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1a1d) = extraout_XMM0_Da_x00391;
  *(undefined4 *)((long)puVar4 + 0xd0ec) = extraout_XMM0_Db_x00391;
  *(undefined4 *)(puVar4 + 0x1a1e) = extraout_XMM0_Dc_x00391;
  *(undefined4 *)((long)puVar4 + 0xd0f4) = extraout_XMM0_Dd_x00391;
  puVar4[-0x346] = 0x8f5942;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1a2c];
  *puVar1 = extraout_XMM0_Da_x00392;
  puVar1[1] = extraout_XMM0_Db_x00392;
  puVar1[2] = extraout_XMM0_Dc_x00392;
  puVar1[3] = extraout_XMM0_Dd_x00392;
  puVar4[-0x346] = 0x8f5962;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1a24];
  *puVar1 = extraout_XMM0_Da_x00393;
  puVar1[1] = extraout_XMM0_Db_x00393;
  puVar1[2] = extraout_XMM0_Dc_x00393;
  puVar1[3] = extraout_XMM0_Dd_x00393;
  puVar4[0x89] = puVar4[0x1df3];
  puVar4[0x8a] = puVar4[0x1df4];
  puVar4[0x8b] = puVar4[0x1df1];
  puVar4[0x8c] = puVar4[0x1df2];
  puVar4[0x8d] = puVar4[0x1def];
  puVar4[0x8e] = puVar4[0x1df0];
  puVar4[0x8f] = puVar4[0x1dfb];
  puVar4[0x90] = puVar4[0x1dfc];
  puVar4[0x91] = puVar4[0x1df9];
  puVar4[0x92] = puVar4[0x1dfa];
  puVar4[0x93] = puVar4[0x1df7];
  puVar4[0x94] = puVar4[0x1df8];
  *(undefined4 *)((long)puVar4 + 0x5734) = 0xc76c51a3;
  puVar4[-0x346] = 0x8f59de;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x87) = extraout_XMM0_Da_x00394;
  *(undefined4 *)((long)puVar4 + 0x43c) = extraout_XMM0_Db_x00394;
  *(undefined4 *)(puVar4 + 0x88) = extraout_XMM0_Dc_x00394;
  *(undefined4 *)((long)puVar4 + 0x444) = extraout_XMM0_Dd_x00394;
  puVar4[-0x346] = 0x8f59f3;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x85) = extraout_XMM0_Da_x00395;
  *(undefined4 *)((long)puVar4 + 0x42c) = extraout_XMM0_Db_x00395;
  *(undefined4 *)(puVar4 + 0x86) = extraout_XMM0_Dc_x00395;
  *(undefined4 *)((long)puVar4 + 0x434) = extraout_XMM0_Dd_x00395;
  puVar4[0x83] = puVar4[0x1de5];
  puVar4[0x84] = puVar4[0x1de6];
  puVar4[-0x346] = 0x8f5a18;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f5a38;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f5a48;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1a1b] = puVar4[0x89];
  puVar4[0x1a1c] = puVar4[0x8a];
  puVar4[0x1a19] = puVar4[0x8b];
  puVar4[0x1a1a] = puVar4[0x8c];
  puVar4[0x1a17] = puVar4[0x8d];
  puVar4[0x1a18] = puVar4[0x8e];
  puVar4[0x1a16] = puVar4[0xd14];
  puVar4[0x1a13] = puVar4[0x8f];
  puVar4[0x1a14] = puVar4[0x90];
  puVar4[0x1a11] = puVar4[0x91];
  puVar4[0x1a12] = puVar4[0x92];
  puVar4[0x1a0f] = puVar4[0x93];
  puVar4[0x1a10] = puVar4[0x94];
  puVar4[0x1a0e] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x1a0b) = extraout_XMM0_Da_x00396;
  *(undefined4 *)((long)puVar4 + 0xd05c) = extraout_XMM0_Db_x00396;
  *(undefined4 *)(puVar4 + 0x1a0c) = extraout_XMM0_Dc_x00396;
  *(undefined4 *)((long)puVar4 + 0xd064) = extraout_XMM0_Dd_x00396;
  uVar2 = ((undefined8 *)puVar4[0x1a0e])[1];
  puVar4[0x97] = *(undefined8 *)puVar4[0x1a0e];
  puVar4[0x98] = uVar2;
  puVar4[-0x346] = 0x8f5af0;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x95) = extraout_XMM0_Da_x00397;
  *(undefined4 *)((long)puVar4 + 0x4ac) = extraout_XMM0_Db_x00397;
  *(undefined4 *)(puVar4 + 0x96) = extraout_XMM0_Dc_x00397;
  *(undefined4 *)((long)puVar4 + 0x4b4) = extraout_XMM0_Dd_x00397;
  puVar4[-0x346] = 0x8f5b15;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f5b35;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1a09) = extraout_XMM0_Da_x00398;
  *(undefined4 *)((long)puVar4 + 0xd04c) = extraout_XMM0_Db_x00398;
  *(undefined4 *)(puVar4 + 0x1a0a) = extraout_XMM0_Dc_x00398;
  *(undefined4 *)((long)puVar4 + 0xd054) = extraout_XMM0_Dd_x00398;
  puVar4[-0x346] = 0x8f5b4a;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x99) = extraout_XMM0_Da_x00399;
  *(undefined4 *)((long)puVar4 + 0x4cc) = extraout_XMM0_Db_x00399;
  *(undefined4 *)(puVar4 + 0x9a) = extraout_XMM0_Dc_x00399;
  *(undefined4 *)((long)puVar4 + 0x4d4) = extraout_XMM0_Dd_x00399;
  puVar4[-0x346] = 0x8f5b6f;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f5b7f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1a07) = extraout_XMM0_Da_x00400;
  *(undefined4 *)((long)puVar4 + 0xd03c) = extraout_XMM0_Db_x00400;
  *(undefined4 *)(puVar4 + 0x1a08) = extraout_XMM0_Dc_x00400;
  *(undefined4 *)((long)puVar4 + 0xd044) = extraout_XMM0_Dd_x00400;
  puVar4[-0x346] = 0x8f5b9f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1a16];
  *puVar1 = extraout_XMM0_Da_x00401;
  puVar1[1] = extraout_XMM0_Db_x00401;
  puVar1[2] = extraout_XMM0_Dc_x00401;
  puVar1[3] = extraout_XMM0_Dd_x00401;
  puVar4[-0x346] = 0x8f5bbf;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1a0e];
  *puVar1 = extraout_XMM0_Da_x00402;
  puVar1[1] = extraout_XMM0_Db_x00402;
  puVar1[2] = extraout_XMM0_Dc_x00402;
  puVar1[3] = extraout_XMM0_Dd_x00402;
  puVar4[0xa1] = puVar4[0x1df5];
  puVar4[0xa2] = puVar4[0x1df6];
  puVar4[0xa3] = puVar4[0x1df3];
  puVar4[0xa4] = puVar4[0x1df4];
  puVar4[0xa5] = puVar4[0x1df1];
  puVar4[0xa6] = puVar4[0x1df2];
  puVar4[0xa7] = puVar4[0x1dfd];
  puVar4[0xa8] = puVar4[0x1dfe];
  puVar4[0xa9] = puVar4[0x1dfb];
  puVar4[0xaa] = puVar4[0x1dfc];
  puVar4[0xab] = puVar4[0x1df9];
  puVar4[0xac] = puVar4[0x1dfa];
  *(undefined4 *)((long)puVar4 + 0x5804) = 0xd192e819;
  puVar4[-0x346] = 0x8f5c3b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x9f) = extraout_XMM0_Da_x00403;
  *(undefined4 *)((long)puVar4 + 0x4fc) = extraout_XMM0_Db_x00403;
  *(undefined4 *)(puVar4 + 0xa0) = extraout_XMM0_Dc_x00403;
  *(undefined4 *)((long)puVar4 + 0x504) = extraout_XMM0_Dd_x00403;
  puVar4[-0x346] = 0x8f5c50;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x9d) = extraout_XMM0_Da_x00404;
  *(undefined4 *)((long)puVar4 + 0x4ec) = extraout_XMM0_Db_x00404;
  *(undefined4 *)(puVar4 + 0x9e) = extraout_XMM0_Dc_x00404;
  *(undefined4 *)((long)puVar4 + 0x4f4) = extraout_XMM0_Dd_x00404;
  puVar4[0x9b] = puVar4[0x1de3];
  puVar4[0x9c] = puVar4[0x1de4];
  puVar4[-0x346] = 0x8f5c75;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f5c95;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f5ca5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1a05] = puVar4[0xa1];
  puVar4[0x1a06] = puVar4[0xa2];
  puVar4[0x1a03] = puVar4[0xa3];
  puVar4[0x1a04] = puVar4[0xa4];
  puVar4[0x1a01] = puVar4[0xa5];
  puVar4[0x1a02] = puVar4[0xa6];
  puVar4[0x1a00] = puVar4[0xcae];
  puVar4[0x19fd] = puVar4[0xa7];
  puVar4[0x19fe] = puVar4[0xa8];
  puVar4[0x19fb] = puVar4[0xa9];
  puVar4[0x19fc] = puVar4[0xaa];
  puVar4[0x19f9] = puVar4[0xab];
  puVar4[0x19fa] = puVar4[0xac];
  puVar4[0x19f8] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x19f5) = extraout_XMM0_Da_x00405;
  *(undefined4 *)((long)puVar4 + 0xcfac) = extraout_XMM0_Db_x00405;
  *(undefined4 *)(puVar4 + 0x19f6) = extraout_XMM0_Dc_x00405;
  *(undefined4 *)((long)puVar4 + 0xcfb4) = extraout_XMM0_Dd_x00405;
  uVar2 = ((undefined8 *)puVar4[0x19f8])[1];
  puVar4[0xaf] = *(undefined8 *)puVar4[0x19f8];
  puVar4[0xb0] = uVar2;
  puVar4[-0x346] = 0x8f5d4d;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xad) = extraout_XMM0_Da_x00406;
  *(undefined4 *)((long)puVar4 + 0x56c) = extraout_XMM0_Db_x00406;
  *(undefined4 *)(puVar4 + 0xae) = extraout_XMM0_Dc_x00406;
  *(undefined4 *)((long)puVar4 + 0x574) = extraout_XMM0_Dd_x00406;
  puVar4[-0x346] = 0x8f5d72;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f5d92;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x19f3) = extraout_XMM0_Da_x00407;
  *(undefined4 *)((long)puVar4 + 0xcf9c) = extraout_XMM0_Db_x00407;
  *(undefined4 *)(puVar4 + 0x19f4) = extraout_XMM0_Dc_x00407;
  *(undefined4 *)((long)puVar4 + 0xcfa4) = extraout_XMM0_Dd_x00407;
  puVar4[-0x346] = 0x8f5da7;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xb1) = extraout_XMM0_Da_x00408;
  *(undefined4 *)((long)puVar4 + 0x58c) = extraout_XMM0_Db_x00408;
  *(undefined4 *)(puVar4 + 0xb2) = extraout_XMM0_Dc_x00408;
  *(undefined4 *)((long)puVar4 + 0x594) = extraout_XMM0_Dd_x00408;
  puVar4[-0x346] = 0x8f5dcc;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f5ddc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x19f1) = extraout_XMM0_Da_x00409;
  *(undefined4 *)((long)puVar4 + 0xcf8c) = extraout_XMM0_Db_x00409;
  *(undefined4 *)(puVar4 + 0x19f2) = extraout_XMM0_Dc_x00409;
  *(undefined4 *)((long)puVar4 + 0xcf94) = extraout_XMM0_Dd_x00409;
  puVar4[-0x346] = 0x8f5dfc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1a00];
  *puVar1 = extraout_XMM0_Da_x00410;
  puVar1[1] = extraout_XMM0_Db_x00410;
  puVar1[2] = extraout_XMM0_Dc_x00410;
  puVar1[3] = extraout_XMM0_Dd_x00410;
  puVar4[-0x346] = 0x8f5e1c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x19f8];
  *puVar1 = extraout_XMM0_Da_x00411;
  puVar1[1] = extraout_XMM0_Db_x00411;
  puVar1[2] = extraout_XMM0_Dc_x00411;
  puVar1[3] = extraout_XMM0_Dd_x00411;
  puVar4[0xb9] = puVar4[0x1df7];
  puVar4[0xba] = puVar4[0x1df8];
  puVar4[0xbb] = puVar4[0x1df5];
  puVar4[0xbc] = puVar4[0x1df6];
  puVar4[0xbd] = puVar4[0x1df3];
  puVar4[0xbe] = puVar4[0x1df4];
  puVar4[0xbf] = puVar4[0x1def];
  puVar4[0xc0] = puVar4[0x1df0];
  puVar4[0xc1] = puVar4[0x1dfd];
  puVar4[0xc2] = puVar4[0x1dfe];
  puVar4[0xc3] = puVar4[0x1dfb];
  puVar4[0xc4] = puVar4[0x1dfc];
  *(undefined4 *)((long)puVar4 + 0x58d4) = 0xd6990624;
  puVar4[-0x346] = 0x8f5e98;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xb7) = extraout_XMM0_Da_x00412;
  *(undefined4 *)((long)puVar4 + 0x5bc) = extraout_XMM0_Db_x00412;
  *(undefined4 *)(puVar4 + 0xb8) = extraout_XMM0_Dc_x00412;
  *(undefined4 *)((long)puVar4 + 0x5c4) = extraout_XMM0_Dd_x00412;
  puVar4[-0x346] = 0x8f5ead;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xb5) = extraout_XMM0_Da_x00413;
  *(undefined4 *)((long)puVar4 + 0x5ac) = extraout_XMM0_Db_x00413;
  *(undefined4 *)(puVar4 + 0xb6) = extraout_XMM0_Dc_x00413;
  *(undefined4 *)((long)puVar4 + 0x5b4) = extraout_XMM0_Dd_x00413;
  puVar4[0xb3] = puVar4[0x1de1];
  puVar4[0xb4] = puVar4[0x1de2];
  puVar4[-0x346] = 0x8f5ed2;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f5ef2;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f5f02;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x19ef] = puVar4[0xb9];
  puVar4[0x19f0] = puVar4[0xba];
  puVar4[0x19ed] = puVar4[0xbb];
  puVar4[0x19ee] = puVar4[0xbc];
  puVar4[0x19eb] = puVar4[0xbd];
  puVar4[0x19ec] = puVar4[0xbe];
  puVar4[0x19ea] = puVar4[0xccc];
  puVar4[0x19e7] = puVar4[0xbf];
  puVar4[0x19e8] = puVar4[0xc0];
  puVar4[0x19e5] = puVar4[0xc1];
  puVar4[0x19e6] = puVar4[0xc2];
  puVar4[0x19e3] = puVar4[0xc3];
  puVar4[0x19e4] = puVar4[0xc4];
  puVar4[0x19e2] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x19df) = extraout_XMM0_Da_x00414;
  *(undefined4 *)((long)puVar4 + 0xcefc) = extraout_XMM0_Db_x00414;
  *(undefined4 *)(puVar4 + 0x19e0) = extraout_XMM0_Dc_x00414;
  *(undefined4 *)((long)puVar4 + 0xcf04) = extraout_XMM0_Dd_x00414;
  uVar2 = ((undefined8 *)puVar4[0x19e2])[1];
  puVar4[199] = *(undefined8 *)puVar4[0x19e2];
  puVar4[200] = uVar2;
  puVar4[-0x346] = 0x8f5faa;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xc5) = extraout_XMM0_Da_x00415;
  *(undefined4 *)((long)puVar4 + 0x62c) = extraout_XMM0_Db_x00415;
  *(undefined4 *)(puVar4 + 0xc6) = extraout_XMM0_Dc_x00415;
  *(undefined4 *)((long)puVar4 + 0x634) = extraout_XMM0_Dd_x00415;
  puVar4[-0x346] = 0x8f5fcf;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f5fef;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x19dd) = extraout_XMM0_Da_x00416;
  *(undefined4 *)((long)puVar4 + 0xceec) = extraout_XMM0_Db_x00416;
  *(undefined4 *)(puVar4 + 0x19de) = extraout_XMM0_Dc_x00416;
  *(undefined4 *)((long)puVar4 + 0xcef4) = extraout_XMM0_Dd_x00416;
  puVar4[-0x346] = 0x8f6004;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xc9) = extraout_XMM0_Da_x00417;
  *(undefined4 *)((long)puVar4 + 0x64c) = extraout_XMM0_Db_x00417;
  *(undefined4 *)(puVar4 + 0xca) = extraout_XMM0_Dc_x00417;
  *(undefined4 *)((long)puVar4 + 0x654) = extraout_XMM0_Dd_x00417;
  puVar4[-0x346] = 0x8f6029;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f6039;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x19db) = extraout_XMM0_Da_x00418;
  *(undefined4 *)((long)puVar4 + 0xcedc) = extraout_XMM0_Db_x00418;
  *(undefined4 *)(puVar4 + 0x19dc) = extraout_XMM0_Dc_x00418;
  *(undefined4 *)((long)puVar4 + 0xcee4) = extraout_XMM0_Dd_x00418;
  puVar4[-0x346] = 0x8f6059;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x19ea];
  *puVar1 = extraout_XMM0_Da_x00419;
  puVar1[1] = extraout_XMM0_Db_x00419;
  puVar1[2] = extraout_XMM0_Dc_x00419;
  puVar1[3] = extraout_XMM0_Dd_x00419;
  puVar4[-0x346] = 0x8f6079;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x19e2];
  *puVar1 = extraout_XMM0_Da_x00420;
  puVar1[1] = extraout_XMM0_Db_x00420;
  puVar1[2] = extraout_XMM0_Dc_x00420;
  puVar1[3] = extraout_XMM0_Dd_x00420;
  puVar4[0xd1] = puVar4[0x1df9];
  puVar4[0xd2] = puVar4[0x1dfa];
  puVar4[0xd3] = puVar4[0x1df7];
  puVar4[0xd4] = puVar4[0x1df8];
  puVar4[0xd5] = puVar4[0x1df5];
  puVar4[0xd6] = puVar4[0x1df6];
  puVar4[0xd7] = puVar4[0x1df1];
  puVar4[0xd8] = puVar4[0x1df2];
  puVar4[0xd9] = puVar4[0x1def];
  puVar4[0xda] = puVar4[0x1df0];
  puVar4[0xdb] = puVar4[0x1dfd];
  puVar4[0xdc] = puVar4[0x1dfe];
  *(undefined4 *)((long)puVar4 + 0x599c) = 0xf40e3585;
  puVar4[-0x346] = 0x8f60f5;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xcf) = extraout_XMM0_Da_x00421;
  *(undefined4 *)((long)puVar4 + 0x67c) = extraout_XMM0_Db_x00421;
  *(undefined4 *)(puVar4 + 0xd0) = extraout_XMM0_Dc_x00421;
  *(undefined4 *)((long)puVar4 + 0x684) = extraout_XMM0_Dd_x00421;
  puVar4[-0x346] = 0x8f610a;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xcd) = extraout_XMM0_Da_x00422;
  *(undefined4 *)((long)puVar4 + 0x66c) = extraout_XMM0_Db_x00422;
  *(undefined4 *)(puVar4 + 0xce) = extraout_XMM0_Dc_x00422;
  *(undefined4 *)((long)puVar4 + 0x674) = extraout_XMM0_Dd_x00422;
  puVar4[0xcb] = puVar4[0x1ddf];
  puVar4[0xcc] = puVar4[0x1de0];
  puVar4[-0x346] = 0x8f612f;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f614f;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f615f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x19d9] = puVar4[0xd1];
  puVar4[0x19da] = puVar4[0xd2];
  puVar4[0x19d7] = puVar4[0xd3];
  puVar4[0x19d8] = puVar4[0xd4];
  puVar4[0x19d5] = puVar4[0xd5];
  puVar4[0x19d6] = puVar4[0xd6];
  puVar4[0x19d4] = puVar4[0xcec];
  puVar4[0x19d1] = puVar4[0xd7];
  puVar4[0x19d2] = puVar4[0xd8];
  puVar4[0x19cf] = puVar4[0xd9];
  puVar4[0x19d0] = puVar4[0xda];
  puVar4[0x19cd] = puVar4[0xdb];
  puVar4[0x19ce] = puVar4[0xdc];
  puVar4[0x19cc] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x19c9) = extraout_XMM0_Da_x00423;
  *(undefined4 *)((long)puVar4 + 0xce4c) = extraout_XMM0_Db_x00423;
  *(undefined4 *)(puVar4 + 0x19ca) = extraout_XMM0_Dc_x00423;
  *(undefined4 *)((long)puVar4 + 0xce54) = extraout_XMM0_Dd_x00423;
  uVar2 = ((undefined8 *)puVar4[0x19cc])[1];
  puVar4[0xdf] = *(undefined8 *)puVar4[0x19cc];
  puVar4[0xe0] = uVar2;
  puVar4[-0x346] = 0x8f6207;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xdd) = extraout_XMM0_Da_x00424;
  *(undefined4 *)((long)puVar4 + 0x6ec) = extraout_XMM0_Db_x00424;
  *(undefined4 *)(puVar4 + 0xde) = extraout_XMM0_Dc_x00424;
  *(undefined4 *)((long)puVar4 + 0x6f4) = extraout_XMM0_Dd_x00424;
  puVar4[-0x346] = 0x8f622c;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f624c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x19c7) = extraout_XMM0_Da_x00425;
  *(undefined4 *)((long)puVar4 + 0xce3c) = extraout_XMM0_Db_x00425;
  *(undefined4 *)(puVar4 + 0x19c8) = extraout_XMM0_Dc_x00425;
  *(undefined4 *)((long)puVar4 + 0xce44) = extraout_XMM0_Dd_x00425;
  puVar4[-0x346] = 0x8f6261;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xe1) = extraout_XMM0_Da_x00426;
  *(undefined4 *)((long)puVar4 + 0x70c) = extraout_XMM0_Db_x00426;
  *(undefined4 *)(puVar4 + 0xe2) = extraout_XMM0_Dc_x00426;
  *(undefined4 *)((long)puVar4 + 0x714) = extraout_XMM0_Dd_x00426;
  puVar4[-0x346] = 0x8f6286;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f6296;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x19c5) = extraout_XMM0_Da_x00427;
  *(undefined4 *)((long)puVar4 + 0xce2c) = extraout_XMM0_Db_x00427;
  *(undefined4 *)(puVar4 + 0x19c6) = extraout_XMM0_Dc_x00427;
  *(undefined4 *)((long)puVar4 + 0xce34) = extraout_XMM0_Dd_x00427;
  puVar4[-0x346] = 0x8f62b6;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x19d4];
  *puVar1 = extraout_XMM0_Da_x00428;
  puVar1[1] = extraout_XMM0_Db_x00428;
  puVar1[2] = extraout_XMM0_Dc_x00428;
  puVar1[3] = extraout_XMM0_Dd_x00428;
  puVar4[-0x346] = 0x8f62d6;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x19cc];
  *puVar1 = extraout_XMM0_Da_x00429;
  puVar1[1] = extraout_XMM0_Db_x00429;
  puVar1[2] = extraout_XMM0_Dc_x00429;
  puVar1[3] = extraout_XMM0_Dd_x00429;
  puVar4[0xe9] = puVar4[0x1dfb];
  puVar4[0xea] = puVar4[0x1dfc];
  puVar4[0xeb] = puVar4[0x1df9];
  puVar4[0xec] = puVar4[0x1dfa];
  puVar4[0xed] = puVar4[0x1df7];
  puVar4[0xee] = puVar4[0x1df8];
  puVar4[0xef] = puVar4[0x1df3];
  puVar4[0xf0] = puVar4[0x1df4];
  puVar4[0xf1] = puVar4[0x1df1];
  puVar4[0xf2] = puVar4[0x1df2];
  puVar4[0xf3] = puVar4[0x1def];
  puVar4[0xf4] = puVar4[0x1df0];
  *(undefined4 *)((long)puVar4 + 0x5a6c) = 0x106aa070;
  puVar4[-0x346] = 0x8f6352;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xe7) = extraout_XMM0_Da_x00430;
  *(undefined4 *)((long)puVar4 + 0x73c) = extraout_XMM0_Db_x00430;
  *(undefined4 *)(puVar4 + 0xe8) = extraout_XMM0_Dc_x00430;
  *(undefined4 *)((long)puVar4 + 0x744) = extraout_XMM0_Dd_x00430;
  puVar4[-0x346] = 0x8f6367;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xe5) = extraout_XMM0_Da_x00431;
  *(undefined4 *)((long)puVar4 + 0x72c) = extraout_XMM0_Db_x00431;
  *(undefined4 *)(puVar4 + 0xe6) = extraout_XMM0_Dc_x00431;
  *(undefined4 *)((long)puVar4 + 0x734) = extraout_XMM0_Dd_x00431;
  puVar4[0xe3] = puVar4[0x1ddd];
  puVar4[0xe4] = puVar4[0x1dde];
  puVar4[-0x346] = 0x8f638c;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f63ac;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f63bc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x19c3] = puVar4[0xe9];
  puVar4[0x19c4] = puVar4[0xea];
  puVar4[0x19c1] = puVar4[0xeb];
  puVar4[0x19c2] = puVar4[0xec];
  puVar4[0x19bf] = puVar4[0xed];
  puVar4[0x19c0] = puVar4[0xee];
  puVar4[0x19be] = puVar4[0xd0c];
  puVar4[0x19bb] = puVar4[0xef];
  puVar4[0x19bc] = puVar4[0xf0];
  puVar4[0x19b9] = puVar4[0xf1];
  puVar4[0x19ba] = puVar4[0xf2];
  puVar4[0x19b7] = puVar4[0xf3];
  puVar4[0x19b8] = puVar4[0xf4];
  puVar4[0x19b6] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x19b3) = extraout_XMM0_Da_x00432;
  *(undefined4 *)((long)puVar4 + 0xcd9c) = extraout_XMM0_Db_x00432;
  *(undefined4 *)(puVar4 + 0x19b4) = extraout_XMM0_Dc_x00432;
  *(undefined4 *)((long)puVar4 + 0xcda4) = extraout_XMM0_Dd_x00432;
  uVar2 = ((undefined8 *)puVar4[0x19b6])[1];
  puVar4[0xf7] = *(undefined8 *)puVar4[0x19b6];
  puVar4[0xf8] = uVar2;
  puVar4[-0x346] = 0x8f6464;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xf5) = extraout_XMM0_Da_x00433;
  *(undefined4 *)((long)puVar4 + 0x7ac) = extraout_XMM0_Db_x00433;
  *(undefined4 *)(puVar4 + 0xf6) = extraout_XMM0_Dc_x00433;
  *(undefined4 *)((long)puVar4 + 0x7b4) = extraout_XMM0_Dd_x00433;
  puVar4[-0x346] = 0x8f6489;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f64a9;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x19b1) = extraout_XMM0_Da_x00434;
  *(undefined4 *)((long)puVar4 + 0xcd8c) = extraout_XMM0_Db_x00434;
  *(undefined4 *)(puVar4 + 0x19b2) = extraout_XMM0_Dc_x00434;
  *(undefined4 *)((long)puVar4 + 0xcd94) = extraout_XMM0_Dd_x00434;
  puVar4[-0x346] = 0x8f64be;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xf9) = extraout_XMM0_Da_x00435;
  *(undefined4 *)((long)puVar4 + 0x7cc) = extraout_XMM0_Db_x00435;
  *(undefined4 *)(puVar4 + 0xfa) = extraout_XMM0_Dc_x00435;
  *(undefined4 *)((long)puVar4 + 0x7d4) = extraout_XMM0_Dd_x00435;
  puVar4[-0x346] = 0x8f64e3;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f64f3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x19af) = extraout_XMM0_Da_x00436;
  *(undefined4 *)((long)puVar4 + 0xcd7c) = extraout_XMM0_Db_x00436;
  *(undefined4 *)(puVar4 + 0x19b0) = extraout_XMM0_Dc_x00436;
  *(undefined4 *)((long)puVar4 + 0xcd84) = extraout_XMM0_Dd_x00436;
  puVar4[-0x346] = 0x8f6513;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x19be];
  *puVar1 = extraout_XMM0_Da_x00437;
  puVar1[1] = extraout_XMM0_Db_x00437;
  puVar1[2] = extraout_XMM0_Dc_x00437;
  puVar1[3] = extraout_XMM0_Dd_x00437;
  puVar4[-0x346] = 0x8f6533;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x19b6];
  *puVar1 = extraout_XMM0_Da_x00438;
  puVar1[1] = extraout_XMM0_Db_x00438;
  puVar1[2] = extraout_XMM0_Dc_x00438;
  puVar1[3] = extraout_XMM0_Dd_x00438;
  puVar4[0x101] = puVar4[0x1dfd];
  puVar4[0x102] = puVar4[0x1dfe];
  puVar4[0x103] = puVar4[0x1dfb];
  puVar4[0x104] = puVar4[0x1dfc];
  puVar4[0x105] = puVar4[0x1df9];
  puVar4[0x106] = puVar4[0x1dfa];
  puVar4[0x107] = puVar4[0x1df5];
  puVar4[0x108] = puVar4[0x1df6];
  puVar4[0x109] = puVar4[0x1df3];
  puVar4[0x10a] = puVar4[0x1df4];
  puVar4[0x10b] = puVar4[0x1df1];
  puVar4[0x10c] = puVar4[0x1df2];
  *(undefined4 *)((long)puVar4 + 0x5b3c) = 0x19a4c116;
  puVar4[-0x346] = 0x8f65af;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xff) = extraout_XMM0_Da_x00439;
  *(undefined4 *)((long)puVar4 + 0x7fc) = extraout_XMM0_Db_x00439;
  *(undefined4 *)(puVar4 + 0x100) = extraout_XMM0_Dc_x00439;
  *(undefined4 *)((long)puVar4 + 0x804) = extraout_XMM0_Dd_x00439;
  puVar4[-0x346] = 0x8f65c4;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xfd) = extraout_XMM0_Da_x00440;
  *(undefined4 *)((long)puVar4 + 0x7ec) = extraout_XMM0_Db_x00440;
  *(undefined4 *)(puVar4 + 0xfe) = extraout_XMM0_Dc_x00440;
  *(undefined4 *)((long)puVar4 + 0x7f4) = extraout_XMM0_Dd_x00440;
  puVar4[0xfb] = puVar4[0x1ddb];
  puVar4[0xfc] = puVar4[0x1ddc];
  puVar4[-0x346] = 0x8f65e9;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f6609;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f6619;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x19ad] = puVar4[0x101];
  puVar4[0x19ae] = puVar4[0x102];
  puVar4[0x19ab] = puVar4[0x103];
  puVar4[0x19ac] = puVar4[0x104];
  puVar4[0x19a9] = puVar4[0x105];
  puVar4[0x19aa] = puVar4[0x106];
  puVar4[0x19a8] = puVar4[0xcb6];
  puVar4[0x19a5] = puVar4[0x107];
  puVar4[0x19a6] = puVar4[0x108];
  puVar4[0x19a3] = puVar4[0x109];
  puVar4[0x19a4] = puVar4[0x10a];
  puVar4[0x19a1] = puVar4[0x10b];
  puVar4[0x19a2] = puVar4[0x10c];
  puVar4[0x19a0] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x199d) = extraout_XMM0_Da_x00441;
  *(undefined4 *)((long)puVar4 + 0xccec) = extraout_XMM0_Db_x00441;
  *(undefined4 *)(puVar4 + 0x199e) = extraout_XMM0_Dc_x00441;
  *(undefined4 *)((long)puVar4 + 0xccf4) = extraout_XMM0_Dd_x00441;
  uVar2 = ((undefined8 *)puVar4[0x19a0])[1];
  puVar4[0x10f] = *(undefined8 *)puVar4[0x19a0];
  puVar4[0x110] = uVar2;
  puVar4[-0x346] = 0x8f66c1;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x10d) = extraout_XMM0_Da_x00442;
  *(undefined4 *)((long)puVar4 + 0x86c) = extraout_XMM0_Db_x00442;
  *(undefined4 *)(puVar4 + 0x10e) = extraout_XMM0_Dc_x00442;
  *(undefined4 *)((long)puVar4 + 0x874) = extraout_XMM0_Dd_x00442;
  puVar4[-0x346] = 0x8f66e6;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f6706;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x199b) = extraout_XMM0_Da_x00443;
  *(undefined4 *)((long)puVar4 + 0xccdc) = extraout_XMM0_Db_x00443;
  *(undefined4 *)(puVar4 + 0x199c) = extraout_XMM0_Dc_x00443;
  *(undefined4 *)((long)puVar4 + 0xcce4) = extraout_XMM0_Dd_x00443;
  puVar4[-0x346] = 0x8f671b;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x111) = extraout_XMM0_Da_x00444;
  *(undefined4 *)((long)puVar4 + 0x88c) = extraout_XMM0_Db_x00444;
  *(undefined4 *)(puVar4 + 0x112) = extraout_XMM0_Dc_x00444;
  *(undefined4 *)((long)puVar4 + 0x894) = extraout_XMM0_Dd_x00444;
  puVar4[-0x346] = 0x8f6740;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f6750;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1999) = extraout_XMM0_Da_x00445;
  *(undefined4 *)((long)puVar4 + 0xcccc) = extraout_XMM0_Db_x00445;
  *(undefined4 *)(puVar4 + 0x199a) = extraout_XMM0_Dc_x00445;
  *(undefined4 *)((long)puVar4 + 0xccd4) = extraout_XMM0_Dd_x00445;
  puVar4[-0x346] = 0x8f6770;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x19a8];
  *puVar1 = extraout_XMM0_Da_x00446;
  puVar1[1] = extraout_XMM0_Db_x00446;
  puVar1[2] = extraout_XMM0_Dc_x00446;
  puVar1[3] = extraout_XMM0_Dd_x00446;
  puVar4[-0x346] = 0x8f6790;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x19a0];
  *puVar1 = extraout_XMM0_Da_x00447;
  puVar1[1] = extraout_XMM0_Db_x00447;
  puVar1[2] = extraout_XMM0_Dc_x00447;
  puVar1[3] = extraout_XMM0_Dd_x00447;
  puVar4[0x119] = puVar4[0x1def];
  puVar4[0x11a] = puVar4[0x1df0];
  puVar4[0x11b] = puVar4[0x1dfd];
  puVar4[0x11c] = puVar4[0x1dfe];
  puVar4[0x11d] = puVar4[0x1dfb];
  puVar4[0x11e] = puVar4[0x1dfc];
  puVar4[0x11f] = puVar4[0x1df7];
  puVar4[0x120] = puVar4[0x1df8];
  puVar4[0x121] = puVar4[0x1df5];
  puVar4[0x122] = puVar4[0x1df6];
  puVar4[0x123] = puVar4[0x1df3];
  puVar4[0x124] = puVar4[0x1df4];
  *(undefined4 *)((long)puVar4 + 0x5c0c) = 0x1e376c08;
  puVar4[-0x346] = 0x8f680c;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x117) = extraout_XMM0_Da_x00448;
  *(undefined4 *)((long)puVar4 + 0x8bc) = extraout_XMM0_Db_x00448;
  *(undefined4 *)(puVar4 + 0x118) = extraout_XMM0_Dc_x00448;
  *(undefined4 *)((long)puVar4 + 0x8c4) = extraout_XMM0_Dd_x00448;
  puVar4[-0x346] = 0x8f6821;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x115) = extraout_XMM0_Da_x00449;
  *(undefined4 *)((long)puVar4 + 0x8ac) = extraout_XMM0_Db_x00449;
  *(undefined4 *)(puVar4 + 0x116) = extraout_XMM0_Dc_x00449;
  *(undefined4 *)((long)puVar4 + 0x8b4) = extraout_XMM0_Dd_x00449;
  puVar4[0x113] = puVar4[0x1dd9];
  puVar4[0x114] = puVar4[0x1dda];
  puVar4[-0x346] = 0x8f6846;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f6866;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f6876;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1997] = puVar4[0x119];
  puVar4[0x1998] = puVar4[0x11a];
  puVar4[0x1995] = puVar4[0x11b];
  puVar4[0x1996] = puVar4[0x11c];
  puVar4[0x1993] = puVar4[0x11d];
  puVar4[0x1994] = puVar4[0x11e];
  puVar4[0x1992] = puVar4[0xcd4];
  puVar4[0x198f] = puVar4[0x11f];
  puVar4[0x1990] = puVar4[0x120];
  puVar4[0x198d] = puVar4[0x121];
  puVar4[0x198e] = puVar4[0x122];
  puVar4[0x198b] = puVar4[0x123];
  puVar4[0x198c] = puVar4[0x124];
  puVar4[0x198a] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x1987) = extraout_XMM0_Da_x00450;
  *(undefined4 *)((long)puVar4 + 0xcc3c) = extraout_XMM0_Db_x00450;
  *(undefined4 *)(puVar4 + 0x1988) = extraout_XMM0_Dc_x00450;
  *(undefined4 *)((long)puVar4 + 0xcc44) = extraout_XMM0_Dd_x00450;
  uVar2 = ((undefined8 *)puVar4[0x198a])[1];
  puVar4[0x127] = *(undefined8 *)puVar4[0x198a];
  puVar4[0x128] = uVar2;
  puVar4[-0x346] = 0x8f691e;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x125) = extraout_XMM0_Da_x00451;
  *(undefined4 *)((long)puVar4 + 0x92c) = extraout_XMM0_Db_x00451;
  *(undefined4 *)(puVar4 + 0x126) = extraout_XMM0_Dc_x00451;
  *(undefined4 *)((long)puVar4 + 0x934) = extraout_XMM0_Dd_x00451;
  puVar4[-0x346] = 0x8f6943;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f6963;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1985) = extraout_XMM0_Da_x00452;
  *(undefined4 *)((long)puVar4 + 0xcc2c) = extraout_XMM0_Db_x00452;
  *(undefined4 *)(puVar4 + 0x1986) = extraout_XMM0_Dc_x00452;
  *(undefined4 *)((long)puVar4 + 0xcc34) = extraout_XMM0_Dd_x00452;
  puVar4[-0x346] = 0x8f6978;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x129) = extraout_XMM0_Da_x00453;
  *(undefined4 *)((long)puVar4 + 0x94c) = extraout_XMM0_Db_x00453;
  *(undefined4 *)(puVar4 + 0x12a) = extraout_XMM0_Dc_x00453;
  *(undefined4 *)((long)puVar4 + 0x954) = extraout_XMM0_Dd_x00453;
  puVar4[-0x346] = 0x8f699d;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f69ad;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1983) = extraout_XMM0_Da_x00454;
  *(undefined4 *)((long)puVar4 + 0xcc1c) = extraout_XMM0_Db_x00454;
  *(undefined4 *)(puVar4 + 0x1984) = extraout_XMM0_Dc_x00454;
  *(undefined4 *)((long)puVar4 + 0xcc24) = extraout_XMM0_Dd_x00454;
  puVar4[-0x346] = 0x8f69cd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1992];
  *puVar1 = extraout_XMM0_Da_x00455;
  puVar1[1] = extraout_XMM0_Db_x00455;
  puVar1[2] = extraout_XMM0_Dc_x00455;
  puVar1[3] = extraout_XMM0_Dd_x00455;
  puVar4[-0x346] = 0x8f69ed;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x198a];
  *puVar1 = extraout_XMM0_Da_x00456;
  puVar1[1] = extraout_XMM0_Db_x00456;
  puVar1[2] = extraout_XMM0_Dc_x00456;
  puVar1[3] = extraout_XMM0_Dd_x00456;
  puVar4[0x131] = puVar4[0x1df1];
  puVar4[0x132] = puVar4[0x1df2];
  puVar4[0x133] = puVar4[0x1def];
  puVar4[0x134] = puVar4[0x1df0];
  puVar4[0x135] = puVar4[0x1dfd];
  puVar4[0x136] = puVar4[0x1dfe];
  puVar4[0x137] = puVar4[0x1df9];
  puVar4[0x138] = puVar4[0x1dfa];
  puVar4[0x139] = puVar4[0x1df7];
  puVar4[0x13a] = puVar4[0x1df8];
  puVar4[0x13b] = puVar4[0x1df5];
  puVar4[0x13c] = puVar4[0x1df6];
  *(undefined4 *)((long)puVar4 + 0x5cdc) = 0x2748774c;
  puVar4[-0x346] = 0x8f6a69;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x12f) = extraout_XMM0_Da_x00457;
  *(undefined4 *)((long)puVar4 + 0x97c) = extraout_XMM0_Db_x00457;
  *(undefined4 *)(puVar4 + 0x130) = extraout_XMM0_Dc_x00457;
  *(undefined4 *)((long)puVar4 + 0x984) = extraout_XMM0_Dd_x00457;
  puVar4[-0x346] = 0x8f6a7e;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x12d) = extraout_XMM0_Da_x00458;
  *(undefined4 *)((long)puVar4 + 0x96c) = extraout_XMM0_Db_x00458;
  *(undefined4 *)(puVar4 + 0x12e) = extraout_XMM0_Dc_x00458;
  *(undefined4 *)((long)puVar4 + 0x974) = extraout_XMM0_Dd_x00458;
  puVar4[299] = puVar4[0x1dd7];
  puVar4[300] = puVar4[0x1dd8];
  puVar4[-0x346] = 0x8f6aa3;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f6ac3;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f6ad3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1981] = puVar4[0x131];
  puVar4[0x1982] = puVar4[0x132];
  puVar4[0x197f] = puVar4[0x133];
  puVar4[0x1980] = puVar4[0x134];
  puVar4[0x197d] = puVar4[0x135];
  puVar4[0x197e] = puVar4[0x136];
  puVar4[0x197c] = puVar4[0xcf4];
  puVar4[0x1979] = puVar4[0x137];
  puVar4[0x197a] = puVar4[0x138];
  puVar4[0x1977] = puVar4[0x139];
  puVar4[0x1978] = puVar4[0x13a];
  puVar4[0x1975] = puVar4[0x13b];
  puVar4[0x1976] = puVar4[0x13c];
  puVar4[0x1974] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x1971) = extraout_XMM0_Da_x00459;
  *(undefined4 *)((long)puVar4 + 0xcb8c) = extraout_XMM0_Db_x00459;
  *(undefined4 *)(puVar4 + 0x1972) = extraout_XMM0_Dc_x00459;
  *(undefined4 *)((long)puVar4 + 0xcb94) = extraout_XMM0_Dd_x00459;
  uVar2 = ((undefined8 *)puVar4[0x1974])[1];
  puVar4[0x13f] = *(undefined8 *)puVar4[0x1974];
  puVar4[0x140] = uVar2;
  puVar4[-0x346] = 0x8f6b7b;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x13d) = extraout_XMM0_Da_x00460;
  *(undefined4 *)((long)puVar4 + 0x9ec) = extraout_XMM0_Db_x00460;
  *(undefined4 *)(puVar4 + 0x13e) = extraout_XMM0_Dc_x00460;
  *(undefined4 *)((long)puVar4 + 0x9f4) = extraout_XMM0_Dd_x00460;
  puVar4[-0x346] = 0x8f6ba0;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f6bc0;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x196f) = extraout_XMM0_Da_x00461;
  *(undefined4 *)((long)puVar4 + 0xcb7c) = extraout_XMM0_Db_x00461;
  *(undefined4 *)(puVar4 + 0x1970) = extraout_XMM0_Dc_x00461;
  *(undefined4 *)((long)puVar4 + 0xcb84) = extraout_XMM0_Dd_x00461;
  puVar4[-0x346] = 0x8f6bd5;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x141) = extraout_XMM0_Da_x00462;
  *(undefined4 *)((long)puVar4 + 0xa0c) = extraout_XMM0_Db_x00462;
  *(undefined4 *)(puVar4 + 0x142) = extraout_XMM0_Dc_x00462;
  *(undefined4 *)((long)puVar4 + 0xa14) = extraout_XMM0_Dd_x00462;
  puVar4[-0x346] = 0x8f6bfa;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f6c0a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x196d) = extraout_XMM0_Da_x00463;
  *(undefined4 *)((long)puVar4 + 0xcb6c) = extraout_XMM0_Db_x00463;
  *(undefined4 *)(puVar4 + 0x196e) = extraout_XMM0_Dc_x00463;
  *(undefined4 *)((long)puVar4 + 0xcb74) = extraout_XMM0_Dd_x00463;
  puVar4[-0x346] = 0x8f6c2a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x197c];
  *puVar1 = extraout_XMM0_Da_x00464;
  puVar1[1] = extraout_XMM0_Db_x00464;
  puVar1[2] = extraout_XMM0_Dc_x00464;
  puVar1[3] = extraout_XMM0_Dd_x00464;
  puVar4[-0x346] = 0x8f6c4a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1974];
  *puVar1 = extraout_XMM0_Da_x00465;
  puVar1[1] = extraout_XMM0_Db_x00465;
  puVar1[2] = extraout_XMM0_Dc_x00465;
  puVar1[3] = extraout_XMM0_Dd_x00465;
  puVar4[0x149] = puVar4[0x1df3];
  puVar4[0x14a] = puVar4[0x1df4];
  puVar4[0x14b] = puVar4[0x1df1];
  puVar4[0x14c] = puVar4[0x1df2];
  puVar4[0x14d] = puVar4[0x1def];
  puVar4[0x14e] = puVar4[0x1df0];
  puVar4[0x14f] = puVar4[0x1dfb];
  puVar4[0x150] = puVar4[0x1dfc];
  puVar4[0x151] = puVar4[0x1df9];
  puVar4[0x152] = puVar4[0x1dfa];
  puVar4[0x153] = puVar4[0x1df7];
  puVar4[0x154] = puVar4[0x1df8];
  *(undefined4 *)((long)puVar4 + 0x5dac) = 0x34b0bcb5;
  puVar4[-0x346] = 0x8f6cc6;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x147) = extraout_XMM0_Da_x00466;
  *(undefined4 *)((long)puVar4 + 0xa3c) = extraout_XMM0_Db_x00466;
  *(undefined4 *)(puVar4 + 0x148) = extraout_XMM0_Dc_x00466;
  *(undefined4 *)((long)puVar4 + 0xa44) = extraout_XMM0_Dd_x00466;
  puVar4[-0x346] = 0x8f6cdb;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x145) = extraout_XMM0_Da_x00467;
  *(undefined4 *)((long)puVar4 + 0xa2c) = extraout_XMM0_Db_x00467;
  *(undefined4 *)(puVar4 + 0x146) = extraout_XMM0_Dc_x00467;
  *(undefined4 *)((long)puVar4 + 0xa34) = extraout_XMM0_Dd_x00467;
  puVar4[0x143] = puVar4[0x1dd5];
  puVar4[0x144] = puVar4[0x1dd6];
  puVar4[-0x346] = 0x8f6d00;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f6d20;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f6d30;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x196b] = puVar4[0x149];
  puVar4[0x196c] = puVar4[0x14a];
  puVar4[0x1969] = puVar4[0x14b];
  puVar4[0x196a] = puVar4[0x14c];
  puVar4[0x1967] = puVar4[0x14d];
  puVar4[0x1968] = puVar4[0x14e];
  puVar4[0x1966] = puVar4[0xd14];
  puVar4[0x1963] = puVar4[0x14f];
  puVar4[0x1964] = puVar4[0x150];
  puVar4[0x1961] = puVar4[0x151];
  puVar4[0x1962] = puVar4[0x152];
  puVar4[0x195f] = puVar4[0x153];
  puVar4[0x1960] = puVar4[0x154];
  puVar4[0x195e] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x195b) = extraout_XMM0_Da_x00468;
  *(undefined4 *)((long)puVar4 + 0xcadc) = extraout_XMM0_Db_x00468;
  *(undefined4 *)(puVar4 + 0x195c) = extraout_XMM0_Dc_x00468;
  *(undefined4 *)((long)puVar4 + 0xcae4) = extraout_XMM0_Dd_x00468;
  uVar2 = ((undefined8 *)puVar4[0x195e])[1];
  puVar4[0x157] = *(undefined8 *)puVar4[0x195e];
  puVar4[0x158] = uVar2;
  puVar4[-0x346] = 0x8f6dd8;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x155) = extraout_XMM0_Da_x00469;
  *(undefined4 *)((long)puVar4 + 0xaac) = extraout_XMM0_Db_x00469;
  *(undefined4 *)(puVar4 + 0x156) = extraout_XMM0_Dc_x00469;
  *(undefined4 *)((long)puVar4 + 0xab4) = extraout_XMM0_Dd_x00469;
  puVar4[-0x346] = 0x8f6dfd;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f6e1d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1959) = extraout_XMM0_Da_x00470;
  *(undefined4 *)((long)puVar4 + 0xcacc) = extraout_XMM0_Db_x00470;
  *(undefined4 *)(puVar4 + 0x195a) = extraout_XMM0_Dc_x00470;
  *(undefined4 *)((long)puVar4 + 0xcad4) = extraout_XMM0_Dd_x00470;
  puVar4[-0x346] = 0x8f6e32;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x159) = extraout_XMM0_Da_x00471;
  *(undefined4 *)((long)puVar4 + 0xacc) = extraout_XMM0_Db_x00471;
  *(undefined4 *)(puVar4 + 0x15a) = extraout_XMM0_Dc_x00471;
  *(undefined4 *)((long)puVar4 + 0xad4) = extraout_XMM0_Dd_x00471;
  puVar4[-0x346] = 0x8f6e57;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f6e67;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1957) = extraout_XMM0_Da_x00472;
  *(undefined4 *)((long)puVar4 + 0xcabc) = extraout_XMM0_Db_x00472;
  *(undefined4 *)(puVar4 + 0x1958) = extraout_XMM0_Dc_x00472;
  *(undefined4 *)((long)puVar4 + 0xcac4) = extraout_XMM0_Dd_x00472;
  puVar4[-0x346] = 0x8f6e87;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1966];
  *puVar1 = extraout_XMM0_Da_x00473;
  puVar1[1] = extraout_XMM0_Db_x00473;
  puVar1[2] = extraout_XMM0_Dc_x00473;
  puVar1[3] = extraout_XMM0_Dd_x00473;
  puVar4[-0x346] = 0x8f6ea7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x195e];
  *puVar1 = extraout_XMM0_Da_x00474;
  puVar1[1] = extraout_XMM0_Db_x00474;
  puVar1[2] = extraout_XMM0_Dc_x00474;
  puVar1[3] = extraout_XMM0_Dd_x00474;
  puVar4[0x161] = puVar4[0x1df5];
  puVar4[0x162] = puVar4[0x1df6];
  puVar4[0x163] = puVar4[0x1df3];
  puVar4[0x164] = puVar4[0x1df4];
  puVar4[0x165] = puVar4[0x1df1];
  puVar4[0x166] = puVar4[0x1df2];
  puVar4[0x167] = puVar4[0x1dfd];
  puVar4[0x168] = puVar4[0x1dfe];
  puVar4[0x169] = puVar4[0x1dfb];
  puVar4[0x16a] = puVar4[0x1dfc];
  puVar4[0x16b] = puVar4[0x1df9];
  puVar4[0x16c] = puVar4[0x1dfa];
  *(undefined4 *)((long)puVar4 + 0x5e7c) = 0x391c0cb3;
  puVar4[-0x346] = 0x8f6f23;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x15f) = extraout_XMM0_Da_x00475;
  *(undefined4 *)((long)puVar4 + 0xafc) = extraout_XMM0_Db_x00475;
  *(undefined4 *)(puVar4 + 0x160) = extraout_XMM0_Dc_x00475;
  *(undefined4 *)((long)puVar4 + 0xb04) = extraout_XMM0_Dd_x00475;
  puVar4[-0x346] = 0x8f6f38;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x15d) = extraout_XMM0_Da_x00476;
  *(undefined4 *)((long)puVar4 + 0xaec) = extraout_XMM0_Db_x00476;
  *(undefined4 *)(puVar4 + 0x15e) = extraout_XMM0_Dc_x00476;
  *(undefined4 *)((long)puVar4 + 0xaf4) = extraout_XMM0_Dd_x00476;
  puVar4[0x15b] = puVar4[0x1dd3];
  puVar4[0x15c] = puVar4[0x1dd4];
  puVar4[-0x346] = 0x8f6f5d;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f6f7d;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f6f8d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1955] = puVar4[0x161];
  puVar4[0x1956] = puVar4[0x162];
  puVar4[0x1953] = puVar4[0x163];
  puVar4[0x1954] = puVar4[0x164];
  puVar4[0x1951] = puVar4[0x165];
  puVar4[0x1952] = puVar4[0x166];
  puVar4[0x1950] = puVar4[0xcae];
  puVar4[0x194d] = puVar4[0x167];
  puVar4[0x194e] = puVar4[0x168];
  puVar4[0x194b] = puVar4[0x169];
  puVar4[0x194c] = puVar4[0x16a];
  puVar4[0x1949] = puVar4[0x16b];
  puVar4[0x194a] = puVar4[0x16c];
  puVar4[0x1948] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x1945) = extraout_XMM0_Da_x00477;
  *(undefined4 *)((long)puVar4 + 0xca2c) = extraout_XMM0_Db_x00477;
  *(undefined4 *)(puVar4 + 0x1946) = extraout_XMM0_Dc_x00477;
  *(undefined4 *)((long)puVar4 + 0xca34) = extraout_XMM0_Dd_x00477;
  uVar2 = ((undefined8 *)puVar4[0x1948])[1];
  puVar4[0x16f] = *(undefined8 *)puVar4[0x1948];
  puVar4[0x170] = uVar2;
  puVar4[-0x346] = 0x8f7035;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x16d) = extraout_XMM0_Da_x00478;
  *(undefined4 *)((long)puVar4 + 0xb6c) = extraout_XMM0_Db_x00478;
  *(undefined4 *)(puVar4 + 0x16e) = extraout_XMM0_Dc_x00478;
  *(undefined4 *)((long)puVar4 + 0xb74) = extraout_XMM0_Dd_x00478;
  puVar4[-0x346] = 0x8f705a;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f707a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1943) = extraout_XMM0_Da_x00479;
  *(undefined4 *)((long)puVar4 + 0xca1c) = extraout_XMM0_Db_x00479;
  *(undefined4 *)(puVar4 + 0x1944) = extraout_XMM0_Dc_x00479;
  *(undefined4 *)((long)puVar4 + 0xca24) = extraout_XMM0_Dd_x00479;
  puVar4[-0x346] = 0x8f708f;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x171) = extraout_XMM0_Da_x00480;
  *(undefined4 *)((long)puVar4 + 0xb8c) = extraout_XMM0_Db_x00480;
  *(undefined4 *)(puVar4 + 0x172) = extraout_XMM0_Dc_x00480;
  *(undefined4 *)((long)puVar4 + 0xb94) = extraout_XMM0_Dd_x00480;
  puVar4[-0x346] = 0x8f70b4;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f70c4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1941) = extraout_XMM0_Da_x00481;
  *(undefined4 *)((long)puVar4 + 0xca0c) = extraout_XMM0_Db_x00481;
  *(undefined4 *)(puVar4 + 0x1942) = extraout_XMM0_Dc_x00481;
  *(undefined4 *)((long)puVar4 + 0xca14) = extraout_XMM0_Dd_x00481;
  puVar4[-0x346] = 0x8f70e4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1950];
  *puVar1 = extraout_XMM0_Da_x00482;
  puVar1[1] = extraout_XMM0_Db_x00482;
  puVar1[2] = extraout_XMM0_Dc_x00482;
  puVar1[3] = extraout_XMM0_Dd_x00482;
  puVar4[-0x346] = 0x8f7104;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1948];
  *puVar1 = extraout_XMM0_Da_x00483;
  puVar1[1] = extraout_XMM0_Db_x00483;
  puVar1[2] = extraout_XMM0_Dc_x00483;
  puVar1[3] = extraout_XMM0_Dd_x00483;
  puVar4[0x179] = puVar4[0x1df7];
  puVar4[0x17a] = puVar4[0x1df8];
  puVar4[0x17b] = puVar4[0x1df5];
  puVar4[0x17c] = puVar4[0x1df6];
  puVar4[0x17d] = puVar4[0x1df3];
  puVar4[0x17e] = puVar4[0x1df4];
  puVar4[0x17f] = puVar4[0x1def];
  puVar4[0x180] = puVar4[0x1df0];
  puVar4[0x181] = puVar4[0x1dfd];
  puVar4[0x182] = puVar4[0x1dfe];
  puVar4[0x183] = puVar4[0x1dfb];
  puVar4[0x184] = puVar4[0x1dfc];
  *(undefined4 *)((long)puVar4 + 0x5f4c) = 0x4ed8aa4a;
  puVar4[-0x346] = 0x8f7180;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x177) = extraout_XMM0_Da_x00484;
  *(undefined4 *)((long)puVar4 + 0xbbc) = extraout_XMM0_Db_x00484;
  *(undefined4 *)(puVar4 + 0x178) = extraout_XMM0_Dc_x00484;
  *(undefined4 *)((long)puVar4 + 0xbc4) = extraout_XMM0_Dd_x00484;
  puVar4[-0x346] = 0x8f7195;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x175) = extraout_XMM0_Da_x00485;
  *(undefined4 *)((long)puVar4 + 0xbac) = extraout_XMM0_Db_x00485;
  *(undefined4 *)(puVar4 + 0x176) = extraout_XMM0_Dc_x00485;
  *(undefined4 *)((long)puVar4 + 0xbb4) = extraout_XMM0_Dd_x00485;
  puVar4[0x173] = puVar4[0x1dd1];
  puVar4[0x174] = puVar4[0x1dd2];
  puVar4[-0x346] = 0x8f71ba;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f71da;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f71ea;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x193f] = puVar4[0x179];
  puVar4[0x1940] = puVar4[0x17a];
  puVar4[0x193d] = puVar4[0x17b];
  puVar4[0x193e] = puVar4[0x17c];
  puVar4[0x193b] = puVar4[0x17d];
  puVar4[0x193c] = puVar4[0x17e];
  puVar4[0x193a] = puVar4[0xccc];
  puVar4[0x1937] = puVar4[0x17f];
  puVar4[0x1938] = puVar4[0x180];
  puVar4[0x1935] = puVar4[0x181];
  puVar4[0x1936] = puVar4[0x182];
  puVar4[0x1933] = puVar4[0x183];
  puVar4[0x1934] = puVar4[0x184];
  puVar4[0x1932] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x192f) = extraout_XMM0_Da_x00486;
  *(undefined4 *)((long)puVar4 + 0xc97c) = extraout_XMM0_Db_x00486;
  *(undefined4 *)(puVar4 + 0x1930) = extraout_XMM0_Dc_x00486;
  *(undefined4 *)((long)puVar4 + 0xc984) = extraout_XMM0_Dd_x00486;
  uVar2 = ((undefined8 *)puVar4[0x1932])[1];
  puVar4[0x187] = *(undefined8 *)puVar4[0x1932];
  puVar4[0x188] = uVar2;
  puVar4[-0x346] = 0x8f7292;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x185) = extraout_XMM0_Da_x00487;
  *(undefined4 *)((long)puVar4 + 0xc2c) = extraout_XMM0_Db_x00487;
  *(undefined4 *)(puVar4 + 0x186) = extraout_XMM0_Dc_x00487;
  *(undefined4 *)((long)puVar4 + 0xc34) = extraout_XMM0_Dd_x00487;
  puVar4[-0x346] = 0x8f72b7;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f72d7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x192d) = extraout_XMM0_Da_x00488;
  *(undefined4 *)((long)puVar4 + 0xc96c) = extraout_XMM0_Db_x00488;
  *(undefined4 *)(puVar4 + 0x192e) = extraout_XMM0_Dc_x00488;
  *(undefined4 *)((long)puVar4 + 0xc974) = extraout_XMM0_Dd_x00488;
  puVar4[-0x346] = 0x8f72ec;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x189) = extraout_XMM0_Da_x00489;
  *(undefined4 *)((long)puVar4 + 0xc4c) = extraout_XMM0_Db_x00489;
  *(undefined4 *)(puVar4 + 0x18a) = extraout_XMM0_Dc_x00489;
  *(undefined4 *)((long)puVar4 + 0xc54) = extraout_XMM0_Dd_x00489;
  puVar4[-0x346] = 0x8f7311;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f7321;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x192b) = extraout_XMM0_Da_x00490;
  *(undefined4 *)((long)puVar4 + 0xc95c) = extraout_XMM0_Db_x00490;
  *(undefined4 *)(puVar4 + 0x192c) = extraout_XMM0_Dc_x00490;
  *(undefined4 *)((long)puVar4 + 0xc964) = extraout_XMM0_Dd_x00490;
  puVar4[-0x346] = 0x8f7341;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x193a];
  *puVar1 = extraout_XMM0_Da_x00491;
  puVar1[1] = extraout_XMM0_Db_x00491;
  puVar1[2] = extraout_XMM0_Dc_x00491;
  puVar1[3] = extraout_XMM0_Dd_x00491;
  puVar4[-0x346] = 0x8f7361;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1932];
  *puVar1 = extraout_XMM0_Da_x00492;
  puVar1[1] = extraout_XMM0_Db_x00492;
  puVar1[2] = extraout_XMM0_Dc_x00492;
  puVar1[3] = extraout_XMM0_Dd_x00492;
  puVar4[0x191] = puVar4[0x1df9];
  puVar4[0x192] = puVar4[0x1dfa];
  puVar4[0x193] = puVar4[0x1df7];
  puVar4[0x194] = puVar4[0x1df8];
  puVar4[0x195] = puVar4[0x1df5];
  puVar4[0x196] = puVar4[0x1df6];
  puVar4[0x197] = puVar4[0x1df1];
  puVar4[0x198] = puVar4[0x1df2];
  puVar4[0x199] = puVar4[0x1def];
  puVar4[0x19a] = puVar4[0x1df0];
  puVar4[0x19b] = puVar4[0x1dfd];
  puVar4[0x19c] = puVar4[0x1dfe];
  *(undefined4 *)((long)puVar4 + 0x601c) = 0x5b9cca4f;
  puVar4[-0x346] = 0x8f73dd;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 399) = extraout_XMM0_Da_x00493;
  *(undefined4 *)((long)puVar4 + 0xc7c) = extraout_XMM0_Db_x00493;
  *(undefined4 *)(puVar4 + 400) = extraout_XMM0_Dc_x00493;
  *(undefined4 *)((long)puVar4 + 0xc84) = extraout_XMM0_Dd_x00493;
  puVar4[-0x346] = 0x8f73f2;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x18d) = extraout_XMM0_Da_x00494;
  *(undefined4 *)((long)puVar4 + 0xc6c) = extraout_XMM0_Db_x00494;
  *(undefined4 *)(puVar4 + 0x18e) = extraout_XMM0_Dc_x00494;
  *(undefined4 *)((long)puVar4 + 0xc74) = extraout_XMM0_Dd_x00494;
  puVar4[0x18b] = puVar4[0x1dcf];
  puVar4[0x18c] = puVar4[0x1dd0];
  puVar4[-0x346] = 0x8f7417;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f7437;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f7447;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1929] = puVar4[0x191];
  puVar4[0x192a] = puVar4[0x192];
  puVar4[0x1927] = puVar4[0x193];
  puVar4[0x1928] = puVar4[0x194];
  puVar4[0x1925] = puVar4[0x195];
  puVar4[0x1926] = puVar4[0x196];
  puVar4[0x1924] = puVar4[0xcec];
  puVar4[0x1921] = puVar4[0x197];
  puVar4[0x1922] = puVar4[0x198];
  puVar4[0x191f] = puVar4[0x199];
  puVar4[0x1920] = puVar4[0x19a];
  puVar4[0x191d] = puVar4[0x19b];
  puVar4[0x191e] = puVar4[0x19c];
  puVar4[0x191c] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x1919) = extraout_XMM0_Da_x00495;
  *(undefined4 *)((long)puVar4 + 0xc8cc) = extraout_XMM0_Db_x00495;
  *(undefined4 *)(puVar4 + 0x191a) = extraout_XMM0_Dc_x00495;
  *(undefined4 *)((long)puVar4 + 0xc8d4) = extraout_XMM0_Dd_x00495;
  uVar2 = ((undefined8 *)puVar4[0x191c])[1];
  puVar4[0x19f] = *(undefined8 *)puVar4[0x191c];
  puVar4[0x1a0] = uVar2;
  puVar4[-0x346] = 0x8f74ef;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x19d) = extraout_XMM0_Da_x00496;
  *(undefined4 *)((long)puVar4 + 0xcec) = extraout_XMM0_Db_x00496;
  *(undefined4 *)(puVar4 + 0x19e) = extraout_XMM0_Dc_x00496;
  *(undefined4 *)((long)puVar4 + 0xcf4) = extraout_XMM0_Dd_x00496;
  puVar4[-0x346] = 0x8f7514;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f7534;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1917) = extraout_XMM0_Da_x00497;
  *(undefined4 *)((long)puVar4 + 0xc8bc) = extraout_XMM0_Db_x00497;
  *(undefined4 *)(puVar4 + 0x1918) = extraout_XMM0_Dc_x00497;
  *(undefined4 *)((long)puVar4 + 0xc8c4) = extraout_XMM0_Dd_x00497;
  puVar4[-0x346] = 0x8f7549;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x1a1) = extraout_XMM0_Da_x00498;
  *(undefined4 *)((long)puVar4 + 0xd0c) = extraout_XMM0_Db_x00498;
  *(undefined4 *)(puVar4 + 0x1a2) = extraout_XMM0_Dc_x00498;
  *(undefined4 *)((long)puVar4 + 0xd14) = extraout_XMM0_Dd_x00498;
  puVar4[-0x346] = 0x8f756e;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f757e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1915) = extraout_XMM0_Da_x00499;
  *(undefined4 *)((long)puVar4 + 0xc8ac) = extraout_XMM0_Db_x00499;
  *(undefined4 *)(puVar4 + 0x1916) = extraout_XMM0_Dc_x00499;
  *(undefined4 *)((long)puVar4 + 0xc8b4) = extraout_XMM0_Dd_x00499;
  puVar4[-0x346] = 0x8f759e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1924];
  *puVar1 = extraout_XMM0_Da_x00500;
  puVar1[1] = extraout_XMM0_Db_x00500;
  puVar1[2] = extraout_XMM0_Dc_x00500;
  puVar1[3] = extraout_XMM0_Dd_x00500;
  puVar4[-0x346] = 0x8f75be;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x191c];
  *puVar1 = extraout_XMM0_Da_x00501;
  puVar1[1] = extraout_XMM0_Db_x00501;
  puVar1[2] = extraout_XMM0_Dc_x00501;
  puVar1[3] = extraout_XMM0_Dd_x00501;
  puVar4[0x1a9] = puVar4[0x1dfb];
  puVar4[0x1aa] = puVar4[0x1dfc];
  puVar4[0x1ab] = puVar4[0x1df9];
  puVar4[0x1ac] = puVar4[0x1dfa];
  puVar4[0x1ad] = puVar4[0x1df7];
  puVar4[0x1ae] = puVar4[0x1df8];
  puVar4[0x1af] = puVar4[0x1df3];
  puVar4[0x1b0] = puVar4[0x1df4];
  puVar4[0x1b1] = puVar4[0x1df1];
  puVar4[0x1b2] = puVar4[0x1df2];
  puVar4[0x1b3] = puVar4[0x1def];
  puVar4[0x1b4] = puVar4[0x1df0];
  *(undefined4 *)((long)puVar4 + 0x60ec) = 0x682e6ff3;
  puVar4[-0x346] = 0x8f763a;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1a7) = extraout_XMM0_Da_x00502;
  *(undefined4 *)((long)puVar4 + 0xd3c) = extraout_XMM0_Db_x00502;
  *(undefined4 *)(puVar4 + 0x1a8) = extraout_XMM0_Dc_x00502;
  *(undefined4 *)((long)puVar4 + 0xd44) = extraout_XMM0_Dd_x00502;
  puVar4[-0x346] = 0x8f764f;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x1a5) = extraout_XMM0_Da_x00503;
  *(undefined4 *)((long)puVar4 + 0xd2c) = extraout_XMM0_Db_x00503;
  *(undefined4 *)(puVar4 + 0x1a6) = extraout_XMM0_Dc_x00503;
  *(undefined4 *)((long)puVar4 + 0xd34) = extraout_XMM0_Dd_x00503;
  puVar4[0x1a3] = puVar4[0x1ded];
  puVar4[0x1a4] = puVar4[0x1dee];
  puVar4[-0x346] = 0x8f7674;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f7694;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f76a4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1913] = puVar4[0x1a9];
  puVar4[0x1914] = puVar4[0x1aa];
  puVar4[0x1911] = puVar4[0x1ab];
  puVar4[0x1912] = puVar4[0x1ac];
  puVar4[0x190f] = puVar4[0x1ad];
  puVar4[0x1910] = puVar4[0x1ae];
  puVar4[0x190e] = puVar4[0xd0c];
  puVar4[0x190b] = puVar4[0x1af];
  puVar4[0x190c] = puVar4[0x1b0];
  puVar4[0x1909] = puVar4[0x1b1];
  puVar4[0x190a] = puVar4[0x1b2];
  puVar4[0x1907] = puVar4[0x1b3];
  puVar4[0x1908] = puVar4[0x1b4];
  puVar4[0x1906] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x1903) = extraout_XMM0_Da_x00504;
  *(undefined4 *)((long)puVar4 + 0xc81c) = extraout_XMM0_Db_x00504;
  *(undefined4 *)(puVar4 + 0x1904) = extraout_XMM0_Dc_x00504;
  *(undefined4 *)((long)puVar4 + 0xc824) = extraout_XMM0_Dd_x00504;
  uVar2 = ((undefined8 *)puVar4[0x1906])[1];
  puVar4[0x1b7] = *(undefined8 *)puVar4[0x1906];
  puVar4[0x1b8] = uVar2;
  puVar4[-0x346] = 0x8f774c;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x1b5) = extraout_XMM0_Da_x00505;
  *(undefined4 *)((long)puVar4 + 0xdac) = extraout_XMM0_Db_x00505;
  *(undefined4 *)(puVar4 + 0x1b6) = extraout_XMM0_Dc_x00505;
  *(undefined4 *)((long)puVar4 + 0xdb4) = extraout_XMM0_Dd_x00505;
  puVar4[-0x346] = 0x8f7771;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f7791;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1901) = extraout_XMM0_Da_x00506;
  *(undefined4 *)((long)puVar4 + 0xc80c) = extraout_XMM0_Db_x00506;
  *(undefined4 *)(puVar4 + 0x1902) = extraout_XMM0_Dc_x00506;
  *(undefined4 *)((long)puVar4 + 0xc814) = extraout_XMM0_Dd_x00506;
  puVar4[-0x346] = 0x8f77a6;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x1b9) = extraout_XMM0_Da_x00507;
  *(undefined4 *)((long)puVar4 + 0xdcc) = extraout_XMM0_Db_x00507;
  *(undefined4 *)(puVar4 + 0x1ba) = extraout_XMM0_Dc_x00507;
  *(undefined4 *)((long)puVar4 + 0xdd4) = extraout_XMM0_Dd_x00507;
  puVar4[-0x346] = 0x8f77cb;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f77db;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x18ff) = extraout_XMM0_Da_x00508;
  *(undefined4 *)((long)puVar4 + 0xc7fc) = extraout_XMM0_Db_x00508;
  *(undefined4 *)(puVar4 + 0x1900) = extraout_XMM0_Dc_x00508;
  *(undefined4 *)((long)puVar4 + 0xc804) = extraout_XMM0_Dd_x00508;
  puVar4[-0x346] = 0x8f77fb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x190e];
  *puVar1 = extraout_XMM0_Da_x00509;
  puVar1[1] = extraout_XMM0_Db_x00509;
  puVar1[2] = extraout_XMM0_Dc_x00509;
  puVar1[3] = extraout_XMM0_Dd_x00509;
  puVar4[-0x346] = 0x8f781b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1906];
  *puVar1 = extraout_XMM0_Da_x00510;
  puVar1[1] = extraout_XMM0_Db_x00510;
  puVar1[2] = extraout_XMM0_Dc_x00510;
  puVar1[3] = extraout_XMM0_Dd_x00510;
  puVar4[0x1c1] = puVar4[0x1dfd];
  puVar4[0x1c2] = puVar4[0x1dfe];
  puVar4[0x1c3] = puVar4[0x1dfb];
  puVar4[0x1c4] = puVar4[0x1dfc];
  puVar4[0x1c5] = puVar4[0x1df9];
  puVar4[0x1c6] = puVar4[0x1dfa];
  puVar4[0x1c7] = puVar4[0x1df5];
  puVar4[0x1c8] = puVar4[0x1df6];
  puVar4[0x1c9] = puVar4[0x1df3];
  puVar4[0x1ca] = puVar4[0x1df4];
  puVar4[0x1cb] = puVar4[0x1df1];
  puVar4[0x1cc] = puVar4[0x1df2];
  *(undefined4 *)((long)puVar4 + 0x61bc) = 0x748f82ee;
  puVar4[-0x346] = 0x8f7897;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1bf) = extraout_XMM0_Da_x00511;
  *(undefined4 *)((long)puVar4 + 0xdfc) = extraout_XMM0_Db_x00511;
  *(undefined4 *)(puVar4 + 0x1c0) = extraout_XMM0_Dc_x00511;
  *(undefined4 *)((long)puVar4 + 0xe04) = extraout_XMM0_Dd_x00511;
  puVar4[-0x346] = 0x8f78ac;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x1bd) = extraout_XMM0_Da_x00512;
  *(undefined4 *)((long)puVar4 + 0xdec) = extraout_XMM0_Db_x00512;
  *(undefined4 *)(puVar4 + 0x1be) = extraout_XMM0_Dc_x00512;
  *(undefined4 *)((long)puVar4 + 0xdf4) = extraout_XMM0_Dd_x00512;
  puVar4[0x1bb] = puVar4[0x1deb];
  puVar4[0x1bc] = puVar4[0x1dec];
  puVar4[-0x346] = 0x8f78d1;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f78f1;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f7901;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x18fd] = puVar4[0x1c1];
  puVar4[0x18fe] = puVar4[0x1c2];
  puVar4[0x18fb] = puVar4[0x1c3];
  puVar4[0x18fc] = puVar4[0x1c4];
  puVar4[0x18f9] = puVar4[0x1c5];
  puVar4[0x18fa] = puVar4[0x1c6];
  puVar4[0x18f8] = puVar4[0xcb6];
  puVar4[0x18f5] = puVar4[0x1c7];
  puVar4[0x18f6] = puVar4[0x1c8];
  puVar4[0x18f3] = puVar4[0x1c9];
  puVar4[0x18f4] = puVar4[0x1ca];
  puVar4[0x18f1] = puVar4[0x1cb];
  puVar4[0x18f2] = puVar4[0x1cc];
  puVar4[0x18f0] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x18ed) = extraout_XMM0_Da_x00513;
  *(undefined4 *)((long)puVar4 + 0xc76c) = extraout_XMM0_Db_x00513;
  *(undefined4 *)(puVar4 + 0x18ee) = extraout_XMM0_Dc_x00513;
  *(undefined4 *)((long)puVar4 + 0xc774) = extraout_XMM0_Dd_x00513;
  uVar2 = ((undefined8 *)puVar4[0x18f0])[1];
  puVar4[0x1cf] = *(undefined8 *)puVar4[0x18f0];
  puVar4[0x1d0] = uVar2;
  puVar4[-0x346] = 0x8f79a9;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x1cd) = extraout_XMM0_Da_x00514;
  *(undefined4 *)((long)puVar4 + 0xe6c) = extraout_XMM0_Db_x00514;
  *(undefined4 *)(puVar4 + 0x1ce) = extraout_XMM0_Dc_x00514;
  *(undefined4 *)((long)puVar4 + 0xe74) = extraout_XMM0_Dd_x00514;
  puVar4[-0x346] = 0x8f79ce;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f79ee;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x18eb) = extraout_XMM0_Da_x00515;
  *(undefined4 *)((long)puVar4 + 0xc75c) = extraout_XMM0_Db_x00515;
  *(undefined4 *)(puVar4 + 0x18ec) = extraout_XMM0_Dc_x00515;
  *(undefined4 *)((long)puVar4 + 0xc764) = extraout_XMM0_Dd_x00515;
  puVar4[-0x346] = 0x8f7a03;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x1d1) = extraout_XMM0_Da_x00516;
  *(undefined4 *)((long)puVar4 + 0xe8c) = extraout_XMM0_Db_x00516;
  *(undefined4 *)(puVar4 + 0x1d2) = extraout_XMM0_Dc_x00516;
  *(undefined4 *)((long)puVar4 + 0xe94) = extraout_XMM0_Dd_x00516;
  puVar4[-0x346] = 0x8f7a28;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f7a38;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x18e9) = extraout_XMM0_Da_x00517;
  *(undefined4 *)((long)puVar4 + 0xc74c) = extraout_XMM0_Db_x00517;
  *(undefined4 *)(puVar4 + 0x18ea) = extraout_XMM0_Dc_x00517;
  *(undefined4 *)((long)puVar4 + 0xc754) = extraout_XMM0_Dd_x00517;
  puVar4[-0x346] = 0x8f7a58;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x18f8];
  *puVar1 = extraout_XMM0_Da_x00518;
  puVar1[1] = extraout_XMM0_Db_x00518;
  puVar1[2] = extraout_XMM0_Dc_x00518;
  puVar1[3] = extraout_XMM0_Dd_x00518;
  puVar4[-0x346] = 0x8f7a78;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x18f0];
  *puVar1 = extraout_XMM0_Da_x00519;
  puVar1[1] = extraout_XMM0_Db_x00519;
  puVar1[2] = extraout_XMM0_Dc_x00519;
  puVar1[3] = extraout_XMM0_Dd_x00519;
  puVar4[0x1d9] = puVar4[0x1def];
  puVar4[0x1da] = puVar4[0x1df0];
  puVar4[0x1db] = puVar4[0x1dfd];
  puVar4[0x1dc] = puVar4[0x1dfe];
  puVar4[0x1dd] = puVar4[0x1dfb];
  puVar4[0x1de] = puVar4[0x1dfc];
  puVar4[0x1df] = puVar4[0x1df7];
  puVar4[0x1e0] = puVar4[0x1df8];
  puVar4[0x1e1] = puVar4[0x1df5];
  puVar4[0x1e2] = puVar4[0x1df6];
  puVar4[0x1e3] = puVar4[0x1df3];
  puVar4[0x1e4] = puVar4[0x1df4];
  *(undefined4 *)((long)puVar4 + 0x628c) = 0x78a5636f;
  puVar4[-0x346] = 0x8f7af4;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1d7) = extraout_XMM0_Da_x00520;
  *(undefined4 *)((long)puVar4 + 0xebc) = extraout_XMM0_Db_x00520;
  *(undefined4 *)(puVar4 + 0x1d8) = extraout_XMM0_Dc_x00520;
  *(undefined4 *)((long)puVar4 + 0xec4) = extraout_XMM0_Dd_x00520;
  puVar4[-0x346] = 0x8f7b09;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x1d5) = extraout_XMM0_Da_x00521;
  *(undefined4 *)((long)puVar4 + 0xeac) = extraout_XMM0_Db_x00521;
  *(undefined4 *)(puVar4 + 0x1d6) = extraout_XMM0_Dc_x00521;
  *(undefined4 *)((long)puVar4 + 0xeb4) = extraout_XMM0_Dd_x00521;
  puVar4[0x1d3] = puVar4[0x1de9];
  puVar4[0x1d4] = puVar4[0x1dea];
  puVar4[-0x346] = 0x8f7b2e;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f7b4e;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f7b5e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x18e7] = puVar4[0x1d9];
  puVar4[0x18e8] = puVar4[0x1da];
  puVar4[0x18e5] = puVar4[0x1db];
  puVar4[0x18e6] = puVar4[0x1dc];
  puVar4[0x18e3] = puVar4[0x1dd];
  puVar4[0x18e4] = puVar4[0x1de];
  puVar4[0x18e2] = puVar4[0xcd4];
  puVar4[0x18df] = puVar4[0x1df];
  puVar4[0x18e0] = puVar4[0x1e0];
  puVar4[0x18dd] = puVar4[0x1e1];
  puVar4[0x18de] = puVar4[0x1e2];
  puVar4[0x18db] = puVar4[0x1e3];
  puVar4[0x18dc] = puVar4[0x1e4];
  puVar4[0x18da] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x18d7) = extraout_XMM0_Da_x00522;
  *(undefined4 *)((long)puVar4 + 0xc6bc) = extraout_XMM0_Db_x00522;
  *(undefined4 *)(puVar4 + 0x18d8) = extraout_XMM0_Dc_x00522;
  *(undefined4 *)((long)puVar4 + 0xc6c4) = extraout_XMM0_Dd_x00522;
  uVar2 = ((undefined8 *)puVar4[0x18da])[1];
  puVar4[0x1e7] = *(undefined8 *)puVar4[0x18da];
  puVar4[0x1e8] = uVar2;
  puVar4[-0x346] = 0x8f7c06;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x1e5) = extraout_XMM0_Da_x00523;
  *(undefined4 *)((long)puVar4 + 0xf2c) = extraout_XMM0_Db_x00523;
  *(undefined4 *)(puVar4 + 0x1e6) = extraout_XMM0_Dc_x00523;
  *(undefined4 *)((long)puVar4 + 0xf34) = extraout_XMM0_Dd_x00523;
  puVar4[-0x346] = 0x8f7c2b;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f7c4b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x18d5) = extraout_XMM0_Da_x00524;
  *(undefined4 *)((long)puVar4 + 0xc6ac) = extraout_XMM0_Db_x00524;
  *(undefined4 *)(puVar4 + 0x18d6) = extraout_XMM0_Dc_x00524;
  *(undefined4 *)((long)puVar4 + 0xc6b4) = extraout_XMM0_Dd_x00524;
  puVar4[-0x346] = 0x8f7c60;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x1e9) = extraout_XMM0_Da_x00525;
  *(undefined4 *)((long)puVar4 + 0xf4c) = extraout_XMM0_Db_x00525;
  *(undefined4 *)(puVar4 + 0x1ea) = extraout_XMM0_Dc_x00525;
  *(undefined4 *)((long)puVar4 + 0xf54) = extraout_XMM0_Dd_x00525;
  puVar4[-0x346] = 0x8f7c85;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f7c95;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x18d3) = extraout_XMM0_Da_x00526;
  *(undefined4 *)((long)puVar4 + 0xc69c) = extraout_XMM0_Db_x00526;
  *(undefined4 *)(puVar4 + 0x18d4) = extraout_XMM0_Dc_x00526;
  *(undefined4 *)((long)puVar4 + 0xc6a4) = extraout_XMM0_Dd_x00526;
  puVar4[-0x346] = 0x8f7cb5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x18e2];
  *puVar1 = extraout_XMM0_Da_x00527;
  puVar1[1] = extraout_XMM0_Db_x00527;
  puVar1[2] = extraout_XMM0_Dc_x00527;
  puVar1[3] = extraout_XMM0_Dd_x00527;
  puVar4[-0x346] = 0x8f7cd5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x18da];
  *puVar1 = extraout_XMM0_Da_x00528;
  puVar1[1] = extraout_XMM0_Db_x00528;
  puVar1[2] = extraout_XMM0_Dc_x00528;
  puVar1[3] = extraout_XMM0_Dd_x00528;
  puVar4[0x1f1] = puVar4[0x1df1];
  puVar4[0x1f2] = puVar4[0x1df2];
  puVar4[499] = puVar4[0x1def];
  puVar4[500] = puVar4[0x1df0];
  puVar4[0x1f5] = puVar4[0x1dfd];
  puVar4[0x1f6] = puVar4[0x1dfe];
  puVar4[0x1f7] = puVar4[0x1df9];
  puVar4[0x1f8] = puVar4[0x1dfa];
  puVar4[0x1f9] = puVar4[0x1df7];
  puVar4[0x1fa] = puVar4[0x1df8];
  puVar4[0x1fb] = puVar4[0x1df5];
  puVar4[0x1fc] = puVar4[0x1df6];
  *(undefined4 *)((long)puVar4 + 0x635c) = 0x84c87814;
  puVar4[-0x346] = 0x8f7d51;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1ef) = extraout_XMM0_Da_x00529;
  *(undefined4 *)((long)puVar4 + 0xf7c) = extraout_XMM0_Db_x00529;
  *(undefined4 *)(puVar4 + 0x1f0) = extraout_XMM0_Dc_x00529;
  *(undefined4 *)((long)puVar4 + 0xf84) = extraout_XMM0_Dd_x00529;
  puVar4[-0x346] = 0x8f7d66;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x1ed) = extraout_XMM0_Da_x00530;
  *(undefined4 *)((long)puVar4 + 0xf6c) = extraout_XMM0_Db_x00530;
  *(undefined4 *)(puVar4 + 0x1ee) = extraout_XMM0_Dc_x00530;
  *(undefined4 *)((long)puVar4 + 0xf74) = extraout_XMM0_Dd_x00530;
  puVar4[0x1eb] = puVar4[0x1de7];
  puVar4[0x1ec] = puVar4[0x1de8];
  puVar4[-0x346] = 0x8f7d8b;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f7dab;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f7dbb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x18d1] = puVar4[0x1f1];
  puVar4[0x18d2] = puVar4[0x1f2];
  puVar4[0x18cf] = puVar4[499];
  puVar4[0x18d0] = puVar4[500];
  puVar4[0x18cd] = puVar4[0x1f5];
  puVar4[0x18ce] = puVar4[0x1f6];
  puVar4[0x18cc] = puVar4[0xcf4];
  puVar4[0x18c9] = puVar4[0x1f7];
  puVar4[0x18ca] = puVar4[0x1f8];
  puVar4[0x18c7] = puVar4[0x1f9];
  puVar4[0x18c8] = puVar4[0x1fa];
  puVar4[0x18c5] = puVar4[0x1fb];
  puVar4[0x18c6] = puVar4[0x1fc];
  puVar4[0x18c4] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x18c1) = extraout_XMM0_Da_x00531;
  *(undefined4 *)((long)puVar4 + 0xc60c) = extraout_XMM0_Db_x00531;
  *(undefined4 *)(puVar4 + 0x18c2) = extraout_XMM0_Dc_x00531;
  *(undefined4 *)((long)puVar4 + 0xc614) = extraout_XMM0_Dd_x00531;
  uVar2 = ((undefined8 *)puVar4[0x18c4])[1];
  puVar4[0x1ff] = *(undefined8 *)puVar4[0x18c4];
  puVar4[0x200] = uVar2;
  puVar4[-0x346] = 0x8f7e63;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x1fd) = extraout_XMM0_Da_x00532;
  *(undefined4 *)((long)puVar4 + 0xfec) = extraout_XMM0_Db_x00532;
  *(undefined4 *)(puVar4 + 0x1fe) = extraout_XMM0_Dc_x00532;
  *(undefined4 *)((long)puVar4 + 0xff4) = extraout_XMM0_Dd_x00532;
  puVar4[-0x346] = 0x8f7e88;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f7ea8;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x18bf) = extraout_XMM0_Da_x00533;
  *(undefined4 *)((long)puVar4 + 0xc5fc) = extraout_XMM0_Db_x00533;
  *(undefined4 *)(puVar4 + 0x18c0) = extraout_XMM0_Dc_x00533;
  *(undefined4 *)((long)puVar4 + 0xc604) = extraout_XMM0_Dd_x00533;
  puVar4[-0x346] = 0x8f7ebd;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x201) = extraout_XMM0_Da_x00534;
  *(undefined4 *)((long)puVar4 + 0x100c) = extraout_XMM0_Db_x00534;
  *(undefined4 *)(puVar4 + 0x202) = extraout_XMM0_Dc_x00534;
  *(undefined4 *)((long)puVar4 + 0x1014) = extraout_XMM0_Dd_x00534;
  puVar4[-0x346] = 0x8f7ee2;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f7ef2;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x18bd) = extraout_XMM0_Da_x00535;
  *(undefined4 *)((long)puVar4 + 0xc5ec) = extraout_XMM0_Db_x00535;
  *(undefined4 *)(puVar4 + 0x18be) = extraout_XMM0_Dc_x00535;
  *(undefined4 *)((long)puVar4 + 0xc5f4) = extraout_XMM0_Dd_x00535;
  puVar4[-0x346] = 0x8f7f12;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x18cc];
  *puVar1 = extraout_XMM0_Da_x00536;
  puVar1[1] = extraout_XMM0_Db_x00536;
  puVar1[2] = extraout_XMM0_Dc_x00536;
  puVar1[3] = extraout_XMM0_Dd_x00536;
  puVar4[-0x346] = 0x8f7f32;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x18c4];
  *puVar1 = extraout_XMM0_Da_x00537;
  puVar1[1] = extraout_XMM0_Db_x00537;
  puVar1[2] = extraout_XMM0_Dc_x00537;
  puVar1[3] = extraout_XMM0_Dd_x00537;
  puVar4[0x209] = puVar4[0x1df3];
  puVar4[0x20a] = puVar4[0x1df4];
  puVar4[0x20b] = puVar4[0x1df1];
  puVar4[0x20c] = puVar4[0x1df2];
  puVar4[0x20d] = puVar4[0x1def];
  puVar4[0x20e] = puVar4[0x1df0];
  puVar4[0x20f] = puVar4[0x1dfb];
  puVar4[0x210] = puVar4[0x1dfc];
  puVar4[0x211] = puVar4[0x1df9];
  puVar4[0x212] = puVar4[0x1dfa];
  puVar4[0x213] = puVar4[0x1df7];
  puVar4[0x214] = puVar4[0x1df8];
  *(undefined4 *)((long)puVar4 + 0x642c) = 0x8cc70208;
  puVar4[-0x346] = 0x8f7fae;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x207) = extraout_XMM0_Da_x00538;
  *(undefined4 *)((long)puVar4 + 0x103c) = extraout_XMM0_Db_x00538;
  *(undefined4 *)(puVar4 + 0x208) = extraout_XMM0_Dc_x00538;
  *(undefined4 *)((long)puVar4 + 0x1044) = extraout_XMM0_Dd_x00538;
  puVar4[-0x346] = 0x8f7fc3;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x205) = extraout_XMM0_Da_x00539;
  *(undefined4 *)((long)puVar4 + 0x102c) = extraout_XMM0_Db_x00539;
  *(undefined4 *)(puVar4 + 0x206) = extraout_XMM0_Dc_x00539;
  *(undefined4 *)((long)puVar4 + 0x1034) = extraout_XMM0_Dd_x00539;
  puVar4[0x203] = puVar4[0x1de5];
  puVar4[0x204] = puVar4[0x1de6];
  puVar4[-0x346] = 0x8f7fe8;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f8008;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f8018;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x18bb] = puVar4[0x209];
  puVar4[0x18bc] = puVar4[0x20a];
  puVar4[0x18b9] = puVar4[0x20b];
  puVar4[0x18ba] = puVar4[0x20c];
  puVar4[0x18b7] = puVar4[0x20d];
  puVar4[0x18b8] = puVar4[0x20e];
  puVar4[0x18b6] = puVar4[0xd14];
  puVar4[0x18b3] = puVar4[0x20f];
  puVar4[0x18b4] = puVar4[0x210];
  puVar4[0x18b1] = puVar4[0x211];
  puVar4[0x18b2] = puVar4[0x212];
  puVar4[0x18af] = puVar4[0x213];
  puVar4[0x18b0] = puVar4[0x214];
  puVar4[0x18ae] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x18ab) = extraout_XMM0_Da_x00540;
  *(undefined4 *)((long)puVar4 + 0xc55c) = extraout_XMM0_Db_x00540;
  *(undefined4 *)(puVar4 + 0x18ac) = extraout_XMM0_Dc_x00540;
  *(undefined4 *)((long)puVar4 + 0xc564) = extraout_XMM0_Dd_x00540;
  uVar2 = ((undefined8 *)puVar4[0x18ae])[1];
  puVar4[0x217] = *(undefined8 *)puVar4[0x18ae];
  puVar4[0x218] = uVar2;
  puVar4[-0x346] = 0x8f80c0;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x215) = extraout_XMM0_Da_x00541;
  *(undefined4 *)((long)puVar4 + 0x10ac) = extraout_XMM0_Db_x00541;
  *(undefined4 *)(puVar4 + 0x216) = extraout_XMM0_Dc_x00541;
  *(undefined4 *)((long)puVar4 + 0x10b4) = extraout_XMM0_Dd_x00541;
  puVar4[-0x346] = 0x8f80e5;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f8105;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x18a9) = extraout_XMM0_Da_x00542;
  *(undefined4 *)((long)puVar4 + 0xc54c) = extraout_XMM0_Db_x00542;
  *(undefined4 *)(puVar4 + 0x18aa) = extraout_XMM0_Dc_x00542;
  *(undefined4 *)((long)puVar4 + 0xc554) = extraout_XMM0_Dd_x00542;
  puVar4[-0x346] = 0x8f811a;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x219) = extraout_XMM0_Da_x00543;
  *(undefined4 *)((long)puVar4 + 0x10cc) = extraout_XMM0_Db_x00543;
  *(undefined4 *)(puVar4 + 0x21a) = extraout_XMM0_Dc_x00543;
  *(undefined4 *)((long)puVar4 + 0x10d4) = extraout_XMM0_Dd_x00543;
  puVar4[-0x346] = 0x8f813f;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f814f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x18a7) = extraout_XMM0_Da_x00544;
  *(undefined4 *)((long)puVar4 + 0xc53c) = extraout_XMM0_Db_x00544;
  *(undefined4 *)(puVar4 + 0x18a8) = extraout_XMM0_Dc_x00544;
  *(undefined4 *)((long)puVar4 + 0xc544) = extraout_XMM0_Dd_x00544;
  puVar4[-0x346] = 0x8f816f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x18b6];
  *puVar1 = extraout_XMM0_Da_x00545;
  puVar1[1] = extraout_XMM0_Db_x00545;
  puVar1[2] = extraout_XMM0_Dc_x00545;
  puVar1[3] = extraout_XMM0_Dd_x00545;
  puVar4[-0x346] = 0x8f818f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x18ae];
  *puVar1 = extraout_XMM0_Da_x00546;
  puVar1[1] = extraout_XMM0_Db_x00546;
  puVar1[2] = extraout_XMM0_Dc_x00546;
  puVar1[3] = extraout_XMM0_Dd_x00546;
  puVar4[0x221] = puVar4[0x1df5];
  puVar4[0x222] = puVar4[0x1df6];
  puVar4[0x223] = puVar4[0x1df3];
  puVar4[0x224] = puVar4[0x1df4];
  puVar4[0x225] = puVar4[0x1df1];
  puVar4[0x226] = puVar4[0x1df2];
  puVar4[0x227] = puVar4[0x1dfd];
  puVar4[0x228] = puVar4[0x1dfe];
  puVar4[0x229] = puVar4[0x1dfb];
  puVar4[0x22a] = puVar4[0x1dfc];
  puVar4[0x22b] = puVar4[0x1df9];
  puVar4[0x22c] = puVar4[0x1dfa];
  *(undefined4 *)((long)puVar4 + 0x64fc) = 0x90befffa;
  puVar4[-0x346] = 0x8f820b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x21f) = extraout_XMM0_Da_x00547;
  *(undefined4 *)((long)puVar4 + 0x10fc) = extraout_XMM0_Db_x00547;
  *(undefined4 *)(puVar4 + 0x220) = extraout_XMM0_Dc_x00547;
  *(undefined4 *)((long)puVar4 + 0x1104) = extraout_XMM0_Dd_x00547;
  puVar4[-0x346] = 0x8f8220;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x21d) = extraout_XMM0_Da_x00548;
  *(undefined4 *)((long)puVar4 + 0x10ec) = extraout_XMM0_Db_x00548;
  *(undefined4 *)(puVar4 + 0x21e) = extraout_XMM0_Dc_x00548;
  *(undefined4 *)((long)puVar4 + 0x10f4) = extraout_XMM0_Dd_x00548;
  puVar4[0x21b] = puVar4[0x1de3];
  puVar4[0x21c] = puVar4[0x1de4];
  puVar4[-0x346] = 0x8f8245;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f8265;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f8275;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x18a5] = puVar4[0x221];
  puVar4[0x18a6] = puVar4[0x222];
  puVar4[0x18a3] = puVar4[0x223];
  puVar4[0x18a4] = puVar4[0x224];
  puVar4[0x18a1] = puVar4[0x225];
  puVar4[0x18a2] = puVar4[0x226];
  puVar4[0x18a0] = puVar4[0xcae];
  puVar4[0x189d] = puVar4[0x227];
  puVar4[0x189e] = puVar4[0x228];
  puVar4[0x189b] = puVar4[0x229];
  puVar4[0x189c] = puVar4[0x22a];
  puVar4[0x1899] = puVar4[0x22b];
  puVar4[0x189a] = puVar4[0x22c];
  puVar4[0x1898] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x1895) = extraout_XMM0_Da_x00549;
  *(undefined4 *)((long)puVar4 + 0xc4ac) = extraout_XMM0_Db_x00549;
  *(undefined4 *)(puVar4 + 0x1896) = extraout_XMM0_Dc_x00549;
  *(undefined4 *)((long)puVar4 + 0xc4b4) = extraout_XMM0_Dd_x00549;
  uVar2 = ((undefined8 *)puVar4[0x1898])[1];
  puVar4[0x22f] = *(undefined8 *)puVar4[0x1898];
  puVar4[0x230] = uVar2;
  puVar4[-0x346] = 0x8f831d;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x22d) = extraout_XMM0_Da_x00550;
  *(undefined4 *)((long)puVar4 + 0x116c) = extraout_XMM0_Db_x00550;
  *(undefined4 *)(puVar4 + 0x22e) = extraout_XMM0_Dc_x00550;
  *(undefined4 *)((long)puVar4 + 0x1174) = extraout_XMM0_Dd_x00550;
  puVar4[-0x346] = 0x8f8342;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f8362;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1893) = extraout_XMM0_Da_x00551;
  *(undefined4 *)((long)puVar4 + 0xc49c) = extraout_XMM0_Db_x00551;
  *(undefined4 *)(puVar4 + 0x1894) = extraout_XMM0_Dc_x00551;
  *(undefined4 *)((long)puVar4 + 0xc4a4) = extraout_XMM0_Dd_x00551;
  puVar4[-0x346] = 0x8f8377;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x231) = extraout_XMM0_Da_x00552;
  *(undefined4 *)((long)puVar4 + 0x118c) = extraout_XMM0_Db_x00552;
  *(undefined4 *)(puVar4 + 0x232) = extraout_XMM0_Dc_x00552;
  *(undefined4 *)((long)puVar4 + 0x1194) = extraout_XMM0_Dd_x00552;
  puVar4[-0x346] = 0x8f839c;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f83ac;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1891) = extraout_XMM0_Da_x00553;
  *(undefined4 *)((long)puVar4 + 0xc48c) = extraout_XMM0_Db_x00553;
  *(undefined4 *)(puVar4 + 0x1892) = extraout_XMM0_Dc_x00553;
  *(undefined4 *)((long)puVar4 + 0xc494) = extraout_XMM0_Dd_x00553;
  puVar4[-0x346] = 0x8f83cc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x18a0];
  *puVar1 = extraout_XMM0_Da_x00554;
  puVar1[1] = extraout_XMM0_Db_x00554;
  puVar1[2] = extraout_XMM0_Dc_x00554;
  puVar1[3] = extraout_XMM0_Dd_x00554;
  puVar4[-0x346] = 0x8f83ec;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1898];
  *puVar1 = extraout_XMM0_Da_x00555;
  puVar1[1] = extraout_XMM0_Db_x00555;
  puVar1[2] = extraout_XMM0_Dc_x00555;
  puVar1[3] = extraout_XMM0_Dd_x00555;
  puVar4[0x239] = puVar4[0x1df7];
  puVar4[0x23a] = puVar4[0x1df8];
  puVar4[0x23b] = puVar4[0x1df5];
  puVar4[0x23c] = puVar4[0x1df6];
  puVar4[0x23d] = puVar4[0x1df3];
  puVar4[0x23e] = puVar4[0x1df4];
  puVar4[0x23f] = puVar4[0x1def];
  puVar4[0x240] = puVar4[0x1df0];
  puVar4[0x241] = puVar4[0x1dfd];
  puVar4[0x242] = puVar4[0x1dfe];
  puVar4[0x243] = puVar4[0x1dfb];
  puVar4[0x244] = puVar4[0x1dfc];
  *(undefined4 *)((long)puVar4 + 0x65ec) = 0xa4506ceb;
  puVar4[-0x346] = 0x8f8468;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x237) = extraout_XMM0_Da_x00556;
  *(undefined4 *)((long)puVar4 + 0x11bc) = extraout_XMM0_Db_x00556;
  *(undefined4 *)(puVar4 + 0x238) = extraout_XMM0_Dc_x00556;
  *(undefined4 *)((long)puVar4 + 0x11c4) = extraout_XMM0_Dd_x00556;
  puVar4[-0x346] = 0x8f847d;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x235) = extraout_XMM0_Da_x00557;
  *(undefined4 *)((long)puVar4 + 0x11ac) = extraout_XMM0_Db_x00557;
  *(undefined4 *)(puVar4 + 0x236) = extraout_XMM0_Dc_x00557;
  *(undefined4 *)((long)puVar4 + 0x11b4) = extraout_XMM0_Dd_x00557;
  puVar4[0x233] = puVar4[0x1de1];
  puVar4[0x234] = puVar4[0x1de2];
  puVar4[-0x346] = 0x8f84a2;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f84c2;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f84d2;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x188f] = puVar4[0x239];
  puVar4[0x1890] = puVar4[0x23a];
  puVar4[0x188d] = puVar4[0x23b];
  puVar4[0x188e] = puVar4[0x23c];
  puVar4[0x188b] = puVar4[0x23d];
  puVar4[0x188c] = puVar4[0x23e];
  puVar4[0x188a] = puVar4[0xccc];
  puVar4[0x1887] = puVar4[0x23f];
  puVar4[0x1888] = puVar4[0x240];
  puVar4[0x1885] = puVar4[0x241];
  puVar4[0x1886] = puVar4[0x242];
  puVar4[0x1883] = puVar4[0x243];
  puVar4[0x1884] = puVar4[0x244];
  puVar4[0x1882] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x187f) = extraout_XMM0_Da_x00558;
  *(undefined4 *)((long)puVar4 + 0xc3fc) = extraout_XMM0_Db_x00558;
  *(undefined4 *)(puVar4 + 0x1880) = extraout_XMM0_Dc_x00558;
  *(undefined4 *)((long)puVar4 + 0xc404) = extraout_XMM0_Dd_x00558;
  uVar2 = ((undefined8 *)puVar4[0x1882])[1];
  puVar4[0x247] = *(undefined8 *)puVar4[0x1882];
  puVar4[0x248] = uVar2;
  puVar4[-0x346] = 0x8f857a;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x245) = extraout_XMM0_Da_x00559;
  *(undefined4 *)((long)puVar4 + 0x122c) = extraout_XMM0_Db_x00559;
  *(undefined4 *)(puVar4 + 0x246) = extraout_XMM0_Dc_x00559;
  *(undefined4 *)((long)puVar4 + 0x1234) = extraout_XMM0_Dd_x00559;
  puVar4[-0x346] = 0x8f859f;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f85bf;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x187d) = extraout_XMM0_Da_x00560;
  *(undefined4 *)((long)puVar4 + 0xc3ec) = extraout_XMM0_Db_x00560;
  *(undefined4 *)(puVar4 + 0x187e) = extraout_XMM0_Dc_x00560;
  *(undefined4 *)((long)puVar4 + 0xc3f4) = extraout_XMM0_Dd_x00560;
  puVar4[-0x346] = 0x8f85d4;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x249) = extraout_XMM0_Da_x00561;
  *(undefined4 *)((long)puVar4 + 0x124c) = extraout_XMM0_Db_x00561;
  *(undefined4 *)(puVar4 + 0x24a) = extraout_XMM0_Dc_x00561;
  *(undefined4 *)((long)puVar4 + 0x1254) = extraout_XMM0_Dd_x00561;
  puVar4[-0x346] = 0x8f85f9;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f8609;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x187b) = extraout_XMM0_Da_x00562;
  *(undefined4 *)((long)puVar4 + 0xc3dc) = extraout_XMM0_Db_x00562;
  *(undefined4 *)(puVar4 + 0x187c) = extraout_XMM0_Dc_x00562;
  *(undefined4 *)((long)puVar4 + 0xc3e4) = extraout_XMM0_Dd_x00562;
  puVar4[-0x346] = 0x8f8629;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x188a];
  *puVar1 = extraout_XMM0_Da_x00563;
  puVar1[1] = extraout_XMM0_Db_x00563;
  puVar1[2] = extraout_XMM0_Dc_x00563;
  puVar1[3] = extraout_XMM0_Dd_x00563;
  puVar4[-0x346] = 0x8f8649;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1882];
  *puVar1 = extraout_XMM0_Da_x00564;
  puVar1[1] = extraout_XMM0_Db_x00564;
  puVar1[2] = extraout_XMM0_Dc_x00564;
  puVar1[3] = extraout_XMM0_Dd_x00564;
  puVar4[0x251] = puVar4[0x1df9];
  puVar4[0x252] = puVar4[0x1dfa];
  puVar4[0x253] = puVar4[0x1df7];
  puVar4[0x254] = puVar4[0x1df8];
  puVar4[0x255] = puVar4[0x1df5];
  puVar4[0x256] = puVar4[0x1df6];
  puVar4[599] = puVar4[0x1df1];
  puVar4[600] = puVar4[0x1df2];
  puVar4[0x259] = puVar4[0x1def];
  puVar4[0x25a] = puVar4[0x1df0];
  puVar4[0x25b] = puVar4[0x1dfd];
  puVar4[0x25c] = puVar4[0x1dfe];
  *(undefined4 *)((long)puVar4 + 0x66e4) = 0xbef9a3f7;
  puVar4[-0x346] = 0x8f86c5;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x24f) = extraout_XMM0_Da_x00565;
  *(undefined4 *)((long)puVar4 + 0x127c) = extraout_XMM0_Db_x00565;
  *(undefined4 *)(puVar4 + 0x250) = extraout_XMM0_Dc_x00565;
  *(undefined4 *)((long)puVar4 + 0x1284) = extraout_XMM0_Dd_x00565;
  puVar4[-0x346] = 0x8f86da;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x24d) = extraout_XMM0_Da_x00566;
  *(undefined4 *)((long)puVar4 + 0x126c) = extraout_XMM0_Db_x00566;
  *(undefined4 *)(puVar4 + 0x24e) = extraout_XMM0_Dc_x00566;
  *(undefined4 *)((long)puVar4 + 0x1274) = extraout_XMM0_Dd_x00566;
  puVar4[0x24b] = puVar4[0x1ddf];
  puVar4[0x24c] = puVar4[0x1de0];
  puVar4[-0x346] = 0x8f86ff;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f871f;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f872f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1879] = puVar4[0x251];
  puVar4[0x187a] = puVar4[0x252];
  puVar4[0x1877] = puVar4[0x253];
  puVar4[0x1878] = puVar4[0x254];
  puVar4[0x1875] = puVar4[0x255];
  puVar4[0x1876] = puVar4[0x256];
  puVar4[0x1874] = puVar4[0xcec];
  puVar4[0x1871] = puVar4[599];
  puVar4[0x1872] = puVar4[600];
  puVar4[0x186f] = puVar4[0x259];
  puVar4[0x1870] = puVar4[0x25a];
  puVar4[0x186d] = puVar4[0x25b];
  puVar4[0x186e] = puVar4[0x25c];
  puVar4[0x186c] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x1869) = extraout_XMM0_Da_x00567;
  *(undefined4 *)((long)puVar4 + 0xc34c) = extraout_XMM0_Db_x00567;
  *(undefined4 *)(puVar4 + 0x186a) = extraout_XMM0_Dc_x00567;
  *(undefined4 *)((long)puVar4 + 0xc354) = extraout_XMM0_Dd_x00567;
  uVar2 = ((undefined8 *)puVar4[0x186c])[1];
  puVar4[0x25f] = *(undefined8 *)puVar4[0x186c];
  puVar4[0x260] = uVar2;
  puVar4[-0x346] = 0x8f87d7;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x25d) = extraout_XMM0_Da_x00568;
  *(undefined4 *)((long)puVar4 + 0x12ec) = extraout_XMM0_Db_x00568;
  *(undefined4 *)(puVar4 + 0x25e) = extraout_XMM0_Dc_x00568;
  *(undefined4 *)((long)puVar4 + 0x12f4) = extraout_XMM0_Dd_x00568;
  puVar4[-0x346] = 0x8f87fc;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f881c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1867) = extraout_XMM0_Da_x00569;
  *(undefined4 *)((long)puVar4 + 0xc33c) = extraout_XMM0_Db_x00569;
  *(undefined4 *)(puVar4 + 0x1868) = extraout_XMM0_Dc_x00569;
  *(undefined4 *)((long)puVar4 + 0xc344) = extraout_XMM0_Dd_x00569;
  puVar4[-0x346] = 0x8f8831;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x261) = extraout_XMM0_Da_x00570;
  *(undefined4 *)((long)puVar4 + 0x130c) = extraout_XMM0_Db_x00570;
  *(undefined4 *)(puVar4 + 0x262) = extraout_XMM0_Dc_x00570;
  *(undefined4 *)((long)puVar4 + 0x1314) = extraout_XMM0_Dd_x00570;
  puVar4[-0x346] = 0x8f8856;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f8866;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1865) = extraout_XMM0_Da_x00571;
  *(undefined4 *)((long)puVar4 + 0xc32c) = extraout_XMM0_Db_x00571;
  *(undefined4 *)(puVar4 + 0x1866) = extraout_XMM0_Dc_x00571;
  *(undefined4 *)((long)puVar4 + 0xc334) = extraout_XMM0_Dd_x00571;
  puVar4[-0x346] = 0x8f8886;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1874];
  *puVar1 = extraout_XMM0_Da_x00572;
  puVar1[1] = extraout_XMM0_Db_x00572;
  puVar1[2] = extraout_XMM0_Dc_x00572;
  puVar1[3] = extraout_XMM0_Dd_x00572;
  puVar4[-0x346] = 0x8f88a6;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x186c];
  *puVar1 = extraout_XMM0_Da_x00573;
  puVar1[1] = extraout_XMM0_Db_x00573;
  puVar1[2] = extraout_XMM0_Dc_x00573;
  puVar1[3] = extraout_XMM0_Dd_x00573;
  puVar4[0x269] = puVar4[0x1dfb];
  puVar4[0x26a] = puVar4[0x1dfc];
  puVar4[0x26b] = puVar4[0x1df9];
  puVar4[0x26c] = puVar4[0x1dfa];
  puVar4[0x26d] = puVar4[0x1df7];
  puVar4[0x26e] = puVar4[0x1df8];
  puVar4[0x26f] = puVar4[0x1df3];
  puVar4[0x270] = puVar4[0x1df4];
  puVar4[0x271] = puVar4[0x1df1];
  puVar4[0x272] = puVar4[0x1df2];
  puVar4[0x273] = puVar4[0x1def];
  puVar4[0x274] = puVar4[0x1df0];
  *(undefined4 *)((long)puVar4 + 0x67e4) = 0xc67178f2;
  puVar4[-0x346] = 0x8f8922;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x267) = extraout_XMM0_Da_x00574;
  *(undefined4 *)((long)puVar4 + 0x133c) = extraout_XMM0_Db_x00574;
  *(undefined4 *)(puVar4 + 0x268) = extraout_XMM0_Dc_x00574;
  *(undefined4 *)((long)puVar4 + 0x1344) = extraout_XMM0_Dd_x00574;
  puVar4[-0x346] = 0x8f8937;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x265) = extraout_XMM0_Da_x00575;
  *(undefined4 *)((long)puVar4 + 0x132c) = extraout_XMM0_Db_x00575;
  *(undefined4 *)(puVar4 + 0x266) = extraout_XMM0_Dc_x00575;
  *(undefined4 *)((long)puVar4 + 0x1334) = extraout_XMM0_Dd_x00575;
  puVar4[0x263] = puVar4[0x1ddd];
  puVar4[0x264] = puVar4[0x1dde];
  puVar4[-0x346] = 0x8f895c;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x8f897c;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x8f898c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1863] = puVar4[0x269];
  puVar4[0x1864] = puVar4[0x26a];
  puVar4[0x1861] = puVar4[0x26b];
  puVar4[0x1862] = puVar4[0x26c];
  puVar4[0x185f] = puVar4[0x26d];
  puVar4[0x1860] = puVar4[0x26e];
  puVar4[0x185e] = puVar4[0xd0c];
  puVar4[0x185b] = puVar4[0x26f];
  puVar4[0x185c] = puVar4[0x270];
  puVar4[0x1859] = puVar4[0x271];
  puVar4[0x185a] = puVar4[0x272];
  puVar4[0x1857] = puVar4[0x273];
  puVar4[0x1858] = puVar4[0x274];
  puVar4[0x1856] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x1853) = extraout_XMM0_Da_x00576;
  *(undefined4 *)((long)puVar4 + 0xc29c) = extraout_XMM0_Db_x00576;
  *(undefined4 *)(puVar4 + 0x1854) = extraout_XMM0_Dc_x00576;
  *(undefined4 *)((long)puVar4 + 0xc2a4) = extraout_XMM0_Dd_x00576;
  uVar2 = ((undefined8 *)puVar4[0x1856])[1];
  puVar4[0x277] = *(undefined8 *)puVar4[0x1856];
  puVar4[0x278] = uVar2;
  puVar4[-0x346] = 0x8f8a34;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x275) = extraout_XMM0_Da_x00577;
  *(undefined4 *)((long)puVar4 + 0x13ac) = extraout_XMM0_Db_x00577;
  *(undefined4 *)(puVar4 + 0x276) = extraout_XMM0_Dc_x00577;
  *(undefined4 *)((long)puVar4 + 0x13b4) = extraout_XMM0_Dd_x00577;
  puVar4[-0x346] = 0x8f8a59;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f8a79;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1851) = extraout_XMM0_Da_x00578;
  *(undefined4 *)((long)puVar4 + 0xc28c) = extraout_XMM0_Db_x00578;
  *(undefined4 *)(puVar4 + 0x1852) = extraout_XMM0_Dc_x00578;
  *(undefined4 *)((long)puVar4 + 0xc294) = extraout_XMM0_Dd_x00578;
  puVar4[-0x346] = 0x8f8a8e;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x279) = extraout_XMM0_Da_x00579;
  *(undefined4 *)((long)puVar4 + 0x13cc) = extraout_XMM0_Db_x00579;
  *(undefined4 *)(puVar4 + 0x27a) = extraout_XMM0_Dc_x00579;
  *(undefined4 *)((long)puVar4 + 0x13d4) = extraout_XMM0_Dd_x00579;
  puVar4[-0x346] = 0x8f8ab3;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f8ac3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x184f) = extraout_XMM0_Da_x00580;
  *(undefined4 *)((long)puVar4 + 0xc27c) = extraout_XMM0_Db_x00580;
  *(undefined4 *)(puVar4 + 0x1850) = extraout_XMM0_Dc_x00580;
  *(undefined4 *)((long)puVar4 + 0xc284) = extraout_XMM0_Dd_x00580;
  puVar4[-0x346] = 0x8f8ae3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x185e];
  *puVar1 = extraout_XMM0_Da_x00581;
  puVar1[1] = extraout_XMM0_Db_x00581;
  puVar1[2] = extraout_XMM0_Dc_x00581;
  puVar1[3] = extraout_XMM0_Dd_x00581;
  puVar4[-0x346] = 0x8f8b03;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1856];
  *puVar1 = extraout_XMM0_Da_x00582;
  puVar1[1] = extraout_XMM0_Db_x00582;
  puVar1[2] = extraout_XMM0_Dc_x00582;
  puVar1[3] = extraout_XMM0_Dd_x00582;
  puVar4[0x27b] = puVar4[0x1dfd];
  puVar4[0x27c] = puVar4[0x1dfe];
  puVar4[-0x346] = 0x8f8b2a;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x8f8b3a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1dfd) = extraout_XMM0_Da_x00583;
  *(undefined4 *)((long)puVar4 + 0xefec) = extraout_XMM0_Db_x00583;
  *(undefined4 *)(puVar4 + 0x1dfe) = extraout_XMM0_Dc_x00583;
  *(undefined4 *)((long)puVar4 + 0xeff4) = extraout_XMM0_Dd_x00583;
  puVar4[0x27d] = puVar4[0x1dfb];
  puVar4[0x27e] = puVar4[0x1dfc];
  puVar4[-0x346] = 0x8f8b5e;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x8f8b6e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1dfb) = extraout_XMM0_Da_x00584;
  *(undefined4 *)((long)puVar4 + 0xefdc) = extraout_XMM0_Db_x00584;
  *(undefined4 *)(puVar4 + 0x1dfc) = extraout_XMM0_Dc_x00584;
  *(undefined4 *)((long)puVar4 + 0xefe4) = extraout_XMM0_Dd_x00584;
  puVar4[0x27f] = puVar4[0x1df9];
  puVar4[0x280] = puVar4[0x1dfa];
  puVar4[-0x346] = 0x8f8b92;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x8f8ba2;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1df9) = extraout_XMM0_Da_x00585;
  *(undefined4 *)((long)puVar4 + 0xefcc) = extraout_XMM0_Db_x00585;
  *(undefined4 *)(puVar4 + 0x1dfa) = extraout_XMM0_Dc_x00585;
  *(undefined4 *)((long)puVar4 + 0xefd4) = extraout_XMM0_Dd_x00585;
  puVar4[0x281] = puVar4[0x1df7];
  puVar4[0x282] = puVar4[0x1df8];
  puVar4[-0x346] = 0x8f8bc6;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x8f8bd6;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1df7) = extraout_XMM0_Da_x00586;
  *(undefined4 *)((long)puVar4 + 0xefbc) = extraout_XMM0_Db_x00586;
  *(undefined4 *)(puVar4 + 0x1df8) = extraout_XMM0_Dc_x00586;
  *(undefined4 *)((long)puVar4 + 0xefc4) = extraout_XMM0_Dd_x00586;
  puVar4[0x283] = puVar4[0x1df5];
  puVar4[0x284] = puVar4[0x1df6];
  puVar4[-0x346] = 0x8f8bfa;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x8f8c0a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1df5) = extraout_XMM0_Da_x00587;
  *(undefined4 *)((long)puVar4 + 0xefac) = extraout_XMM0_Db_x00587;
  *(undefined4 *)(puVar4 + 0x1df6) = extraout_XMM0_Dc_x00587;
  *(undefined4 *)((long)puVar4 + 0xefb4) = extraout_XMM0_Dd_x00587;
  puVar4[0x285] = puVar4[0x1df3];
  puVar4[0x286] = puVar4[0x1df4];
  puVar4[-0x346] = 0x8f8c2e;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x8f8c3e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1df3) = extraout_XMM0_Da_x00588;
  *(undefined4 *)((long)puVar4 + 0xef9c) = extraout_XMM0_Db_x00588;
  *(undefined4 *)(puVar4 + 0x1df4) = extraout_XMM0_Dc_x00588;
  *(undefined4 *)((long)puVar4 + 0xefa4) = extraout_XMM0_Dd_x00588;
  puVar4[0x287] = puVar4[0x1df1];
  puVar4[0x288] = puVar4[0x1df2];
  puVar4[-0x346] = 0x8f8c62;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x8f8c72;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1df1) = extraout_XMM0_Da_x00589;
  *(undefined4 *)((long)puVar4 + 0xef8c) = extraout_XMM0_Db_x00589;
  *(undefined4 *)(puVar4 + 0x1df2) = extraout_XMM0_Dc_x00589;
  *(undefined4 *)((long)puVar4 + 0xef94) = extraout_XMM0_Dd_x00589;
  puVar4[0x289] = puVar4[0x1def];
  puVar4[0x28a] = puVar4[0x1df0];
  puVar4[-0x346] = 0x8f8c96;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x8f8ca6;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1def) = extraout_XMM0_Da_x00590;
  *(undefined4 *)((long)puVar4 + 0xef7c) = extraout_XMM0_Db_x00590;
  *(undefined4 *)(puVar4 + 0x1df0) = extraout_XMM0_Dc_x00590;
  *(undefined4 *)((long)puVar4 + 0xef84) = extraout_XMM0_Dd_x00590;
  puVar4[0xd4b] = puVar4[0x1dfd];
  puVar4[0xd4c] = puVar4[0x1dfe];
  puVar4[0xd49] = puVar4[0x1dfb];
  puVar4[0xd4a] = puVar4[0x1dfc];
  puVar4[0xd47] = puVar4[0x1df9];
  puVar4[0xd48] = puVar4[0x1dfa];
  puVar4[0xd45] = puVar4[0x1df7];
  puVar4[0xd46] = puVar4[0x1df8];
  puVar4[0xd43] = puVar4[0x1df5];
  puVar4[0xd44] = puVar4[0x1df6];
  puVar4[0xd41] = puVar4[0x1df3];
  puVar4[0xd42] = puVar4[0x1df4];
  puVar4[0xd3f] = puVar4[0x1df1];
  puVar4[0xd40] = puVar4[0x1df2];
  puVar4[0xd3d] = puVar4[0x1def];
  puVar4[0xd3e] = puVar4[0x1df0];
  puVar4[0x28b] = puVar4[0x1dfd];
  puVar4[0x28c] = puVar4[0x1dfe];
  puVar4[0x28d] = puVar4[0x1dfb];
  puVar4[0x28e] = puVar4[0x1dfc];
  puVar4[0x28f] = puVar4[0x1df9];
  puVar4[0x290] = puVar4[0x1dfa];
  puVar4[0x291] = puVar4[0x1df5];
  puVar4[0x292] = puVar4[0x1df6];
  puVar4[0x293] = puVar4[0x1df3];
  puVar4[0x294] = puVar4[0x1df4];
  puVar4[0x295] = puVar4[0x1df1];
  puVar4[0x296] = puVar4[0x1df2];
  puVar4[-0x346] = 0x8f8d98;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x184d] = puVar4[0x28b];
  puVar4[0x184e] = puVar4[0x28c];
  puVar4[0x184b] = puVar4[0x28d];
  puVar4[0x184c] = puVar4[0x28e];
  puVar4[0x1849] = puVar4[0x28f];
  puVar4[0x184a] = puVar4[0x290];
  puVar4[0x1848] = puVar4[0xcb6];
  puVar4[0x1845] = puVar4[0x291];
  puVar4[0x1846] = puVar4[0x292];
  puVar4[0x1843] = puVar4[0x293];
  puVar4[0x1844] = puVar4[0x294];
  puVar4[0x1841] = puVar4[0x295];
  puVar4[0x1842] = puVar4[0x296];
  puVar4[0x1840] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x183d) = extraout_XMM0_Da_x00591;
  *(undefined4 *)((long)puVar4 + 0xc1ec) = extraout_XMM0_Db_x00591;
  *(undefined4 *)(puVar4 + 0x183e) = extraout_XMM0_Dc_x00591;
  *(undefined4 *)((long)puVar4 + 0xc1f4) = extraout_XMM0_Dd_x00591;
  uVar2 = ((undefined8 *)puVar4[0x1840])[1];
  puVar4[0x299] = *(undefined8 *)puVar4[0x1840];
  puVar4[0x29a] = uVar2;
  puVar4[-0x346] = 0x8f8e40;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x297) = extraout_XMM0_Da_x00592;
  *(undefined4 *)((long)puVar4 + 0x14bc) = extraout_XMM0_Db_x00592;
  *(undefined4 *)(puVar4 + 0x298) = extraout_XMM0_Dc_x00592;
  *(undefined4 *)((long)puVar4 + 0x14c4) = extraout_XMM0_Dd_x00592;
  puVar4[-0x346] = 0x8f8e65;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f8e85;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x183b) = extraout_XMM0_Da_x00593;
  *(undefined4 *)((long)puVar4 + 0xc1dc) = extraout_XMM0_Db_x00593;
  *(undefined4 *)(puVar4 + 0x183c) = extraout_XMM0_Dc_x00593;
  *(undefined4 *)((long)puVar4 + 0xc1e4) = extraout_XMM0_Dd_x00593;
  puVar4[-0x346] = 0x8f8e9a;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x29b) = extraout_XMM0_Da_x00594;
  *(undefined4 *)((long)puVar4 + 0x14dc) = extraout_XMM0_Db_x00594;
  *(undefined4 *)(puVar4 + 0x29c) = extraout_XMM0_Dc_x00594;
  *(undefined4 *)((long)puVar4 + 0x14e4) = extraout_XMM0_Dd_x00594;
  puVar4[-0x346] = 0x8f8ebf;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f8ecf;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1839) = extraout_XMM0_Da_x00595;
  *(undefined4 *)((long)puVar4 + 0xc1cc) = extraout_XMM0_Db_x00595;
  *(undefined4 *)(puVar4 + 0x183a) = extraout_XMM0_Dc_x00595;
  *(undefined4 *)((long)puVar4 + 0xc1d4) = extraout_XMM0_Dd_x00595;
  puVar4[-0x346] = 0x8f8eef;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1848];
  *puVar1 = extraout_XMM0_Da_x00596;
  puVar1[1] = extraout_XMM0_Db_x00596;
  puVar1[2] = extraout_XMM0_Dc_x00596;
  puVar1[3] = extraout_XMM0_Dd_x00596;
  puVar4[-0x346] = 0x8f8f0f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1840];
  *puVar1 = extraout_XMM0_Da_x00597;
  puVar1[1] = extraout_XMM0_Db_x00597;
  puVar1[2] = extraout_XMM0_Dc_x00597;
  puVar1[3] = extraout_XMM0_Dd_x00597;
  puVar4[0x29d] = puVar4[0x1def];
  puVar4[0x29e] = puVar4[0x1df0];
  puVar4[0x29f] = puVar4[0x1dfd];
  puVar4[0x2a0] = puVar4[0x1dfe];
  puVar4[0x2a1] = puVar4[0x1dfb];
  puVar4[0x2a2] = puVar4[0x1dfc];
  puVar4[0x2a3] = puVar4[0x1df7];
  puVar4[0x2a4] = puVar4[0x1df8];
  puVar4[0x2a5] = puVar4[0x1df5];
  puVar4[0x2a6] = puVar4[0x1df6];
  puVar4[0x2a7] = puVar4[0x1df3];
  puVar4[0x2a8] = puVar4[0x1df4];
  puVar4[-0x346] = 0x8f8f86;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1837] = puVar4[0x29d];
  puVar4[0x1838] = puVar4[0x29e];
  puVar4[0x1835] = puVar4[0x29f];
  puVar4[0x1836] = puVar4[0x2a0];
  puVar4[0x1833] = puVar4[0x2a1];
  puVar4[0x1834] = puVar4[0x2a2];
  puVar4[0x1832] = puVar4[0xcd4];
  puVar4[0x182f] = puVar4[0x2a3];
  puVar4[0x1830] = puVar4[0x2a4];
  puVar4[0x182d] = puVar4[0x2a5];
  puVar4[0x182e] = puVar4[0x2a6];
  puVar4[0x182b] = puVar4[0x2a7];
  puVar4[0x182c] = puVar4[0x2a8];
  puVar4[0x182a] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x1827) = extraout_XMM0_Da_x00598;
  *(undefined4 *)((long)puVar4 + 0xc13c) = extraout_XMM0_Db_x00598;
  *(undefined4 *)(puVar4 + 0x1828) = extraout_XMM0_Dc_x00598;
  *(undefined4 *)((long)puVar4 + 0xc144) = extraout_XMM0_Dd_x00598;
  uVar2 = ((undefined8 *)puVar4[0x182a])[1];
  puVar4[0x2ab] = *(undefined8 *)puVar4[0x182a];
  puVar4[0x2ac] = uVar2;
  puVar4[-0x346] = 0x8f902e;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x2a9) = extraout_XMM0_Da_x00599;
  *(undefined4 *)((long)puVar4 + 0x154c) = extraout_XMM0_Db_x00599;
  *(undefined4 *)(puVar4 + 0x2aa) = extraout_XMM0_Dc_x00599;
  *(undefined4 *)((long)puVar4 + 0x1554) = extraout_XMM0_Dd_x00599;
  puVar4[-0x346] = 0x8f9053;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f9073;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1825) = extraout_XMM0_Da_x00600;
  *(undefined4 *)((long)puVar4 + 0xc12c) = extraout_XMM0_Db_x00600;
  *(undefined4 *)(puVar4 + 0x1826) = extraout_XMM0_Dc_x00600;
  *(undefined4 *)((long)puVar4 + 0xc134) = extraout_XMM0_Dd_x00600;
  puVar4[-0x346] = 0x8f9088;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x2ad) = extraout_XMM0_Da_x00601;
  *(undefined4 *)((long)puVar4 + 0x156c) = extraout_XMM0_Db_x00601;
  *(undefined4 *)(puVar4 + 0x2ae) = extraout_XMM0_Dc_x00601;
  *(undefined4 *)((long)puVar4 + 0x1574) = extraout_XMM0_Dd_x00601;
  puVar4[-0x346] = 0x8f90ad;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f90bd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1823) = extraout_XMM0_Da_x00602;
  *(undefined4 *)((long)puVar4 + 0xc11c) = extraout_XMM0_Db_x00602;
  *(undefined4 *)(puVar4 + 0x1824) = extraout_XMM0_Dc_x00602;
  *(undefined4 *)((long)puVar4 + 0xc124) = extraout_XMM0_Dd_x00602;
  puVar4[-0x346] = 0x8f90dd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1832];
  *puVar1 = extraout_XMM0_Da_x00603;
  puVar1[1] = extraout_XMM0_Db_x00603;
  puVar1[2] = extraout_XMM0_Dc_x00603;
  puVar1[3] = extraout_XMM0_Dd_x00603;
  puVar4[-0x346] = 0x8f90fd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x182a];
  *puVar1 = extraout_XMM0_Da_x00604;
  puVar1[1] = extraout_XMM0_Db_x00604;
  puVar1[2] = extraout_XMM0_Dc_x00604;
  puVar1[3] = extraout_XMM0_Dd_x00604;
  puVar4[0x2af] = puVar4[0x1df1];
  puVar4[0x2b0] = puVar4[0x1df2];
  puVar4[0x2b1] = puVar4[0x1def];
  puVar4[0x2b2] = puVar4[0x1df0];
  puVar4[0x2b3] = puVar4[0x1dfd];
  puVar4[0x2b4] = puVar4[0x1dfe];
  puVar4[0x2b5] = puVar4[0x1df9];
  puVar4[0x2b6] = puVar4[0x1dfa];
  puVar4[0x2b7] = puVar4[0x1df7];
  puVar4[0x2b8] = puVar4[0x1df8];
  puVar4[0x2b9] = puVar4[0x1df5];
  puVar4[0x2ba] = puVar4[0x1df6];
  puVar4[-0x346] = 0x8f9174;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1821] = puVar4[0x2af];
  puVar4[0x1822] = puVar4[0x2b0];
  puVar4[0x181f] = puVar4[0x2b1];
  puVar4[0x1820] = puVar4[0x2b2];
  puVar4[0x181d] = puVar4[0x2b3];
  puVar4[0x181e] = puVar4[0x2b4];
  puVar4[0x181c] = puVar4[0xcf4];
  puVar4[0x1819] = puVar4[0x2b5];
  puVar4[0x181a] = puVar4[0x2b6];
  puVar4[0x1817] = puVar4[0x2b7];
  puVar4[0x1818] = puVar4[0x2b8];
  puVar4[0x1815] = puVar4[0x2b9];
  puVar4[0x1816] = puVar4[0x2ba];
  puVar4[0x1814] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x1811) = extraout_XMM0_Da_x00605;
  *(undefined4 *)((long)puVar4 + 0xc08c) = extraout_XMM0_Db_x00605;
  *(undefined4 *)(puVar4 + 0x1812) = extraout_XMM0_Dc_x00605;
  *(undefined4 *)((long)puVar4 + 0xc094) = extraout_XMM0_Dd_x00605;
  uVar2 = ((undefined8 *)puVar4[0x1814])[1];
  puVar4[0x2bd] = *(undefined8 *)puVar4[0x1814];
  puVar4[0x2be] = uVar2;
  puVar4[-0x346] = 0x8f921c;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 699) = extraout_XMM0_Da_x00606;
  *(undefined4 *)((long)puVar4 + 0x15dc) = extraout_XMM0_Db_x00606;
  *(undefined4 *)(puVar4 + 700) = extraout_XMM0_Dc_x00606;
  *(undefined4 *)((long)puVar4 + 0x15e4) = extraout_XMM0_Dd_x00606;
  puVar4[-0x346] = 0x8f9241;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f9261;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x180f) = extraout_XMM0_Da_x00607;
  *(undefined4 *)((long)puVar4 + 0xc07c) = extraout_XMM0_Db_x00607;
  *(undefined4 *)(puVar4 + 0x1810) = extraout_XMM0_Dc_x00607;
  *(undefined4 *)((long)puVar4 + 0xc084) = extraout_XMM0_Dd_x00607;
  puVar4[-0x346] = 0x8f9276;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x2bf) = extraout_XMM0_Da_x00608;
  *(undefined4 *)((long)puVar4 + 0x15fc) = extraout_XMM0_Db_x00608;
  *(undefined4 *)(puVar4 + 0x2c0) = extraout_XMM0_Dc_x00608;
  *(undefined4 *)((long)puVar4 + 0x1604) = extraout_XMM0_Dd_x00608;
  puVar4[-0x346] = 0x8f929b;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f92ab;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x180d) = extraout_XMM0_Da_x00609;
  *(undefined4 *)((long)puVar4 + 0xc06c) = extraout_XMM0_Db_x00609;
  *(undefined4 *)(puVar4 + 0x180e) = extraout_XMM0_Dc_x00609;
  *(undefined4 *)((long)puVar4 + 0xc074) = extraout_XMM0_Dd_x00609;
  puVar4[-0x346] = 0x8f92cb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x181c];
  *puVar1 = extraout_XMM0_Da_x00610;
  puVar1[1] = extraout_XMM0_Db_x00610;
  puVar1[2] = extraout_XMM0_Dc_x00610;
  puVar1[3] = extraout_XMM0_Dd_x00610;
  puVar4[-0x346] = 0x8f92eb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1814];
  *puVar1 = extraout_XMM0_Da_x00611;
  puVar1[1] = extraout_XMM0_Db_x00611;
  puVar1[2] = extraout_XMM0_Dc_x00611;
  puVar1[3] = extraout_XMM0_Dd_x00611;
  puVar4[0x2c1] = puVar4[0x1df3];
  puVar4[0x2c2] = puVar4[0x1df4];
  puVar4[0x2c3] = puVar4[0x1df1];
  puVar4[0x2c4] = puVar4[0x1df2];
  puVar4[0x2c5] = puVar4[0x1def];
  puVar4[0x2c6] = puVar4[0x1df0];
  puVar4[0x2c7] = puVar4[0x1dfb];
  puVar4[0x2c8] = puVar4[0x1dfc];
  puVar4[0x2c9] = puVar4[0x1df9];
  puVar4[0x2ca] = puVar4[0x1dfa];
  puVar4[0x2cb] = puVar4[0x1df7];
  puVar4[0x2cc] = puVar4[0x1df8];
  puVar4[-0x346] = 0x8f9362;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x180b] = puVar4[0x2c1];
  puVar4[0x180c] = puVar4[0x2c2];
  puVar4[0x1809] = puVar4[0x2c3];
  puVar4[0x180a] = puVar4[0x2c4];
  puVar4[0x1807] = puVar4[0x2c5];
  puVar4[0x1808] = puVar4[0x2c6];
  puVar4[0x1806] = puVar4[0xd14];
  puVar4[0x1803] = puVar4[0x2c7];
  puVar4[0x1804] = puVar4[0x2c8];
  puVar4[0x1801] = puVar4[0x2c9];
  puVar4[0x1802] = puVar4[0x2ca];
  puVar4[0x17ff] = puVar4[0x2cb];
  puVar4[0x1800] = puVar4[0x2cc];
  puVar4[0x17fe] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x17fb) = extraout_XMM0_Da_x00612;
  *(undefined4 *)((long)puVar4 + 0xbfdc) = extraout_XMM0_Db_x00612;
  *(undefined4 *)(puVar4 + 0x17fc) = extraout_XMM0_Dc_x00612;
  *(undefined4 *)((long)puVar4 + 0xbfe4) = extraout_XMM0_Dd_x00612;
  uVar2 = ((undefined8 *)puVar4[0x17fe])[1];
  puVar4[0x2cf] = *(undefined8 *)puVar4[0x17fe];
  puVar4[0x2d0] = uVar2;
  puVar4[-0x346] = 0x8f940a;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x2cd) = extraout_XMM0_Da_x00613;
  *(undefined4 *)((long)puVar4 + 0x166c) = extraout_XMM0_Db_x00613;
  *(undefined4 *)(puVar4 + 0x2ce) = extraout_XMM0_Dc_x00613;
  *(undefined4 *)((long)puVar4 + 0x1674) = extraout_XMM0_Dd_x00613;
  puVar4[-0x346] = 0x8f942f;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f944f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x17f9) = extraout_XMM0_Da_x00614;
  *(undefined4 *)((long)puVar4 + 0xbfcc) = extraout_XMM0_Db_x00614;
  *(undefined4 *)(puVar4 + 0x17fa) = extraout_XMM0_Dc_x00614;
  *(undefined4 *)((long)puVar4 + 0xbfd4) = extraout_XMM0_Dd_x00614;
  puVar4[-0x346] = 0x8f9464;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x2d1) = extraout_XMM0_Da_x00615;
  *(undefined4 *)((long)puVar4 + 0x168c) = extraout_XMM0_Db_x00615;
  *(undefined4 *)(puVar4 + 0x2d2) = extraout_XMM0_Dc_x00615;
  *(undefined4 *)((long)puVar4 + 0x1694) = extraout_XMM0_Dd_x00615;
  puVar4[-0x346] = 0x8f9489;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f9499;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x17f7) = extraout_XMM0_Da_x00616;
  *(undefined4 *)((long)puVar4 + 0xbfbc) = extraout_XMM0_Db_x00616;
  *(undefined4 *)(puVar4 + 0x17f8) = extraout_XMM0_Dc_x00616;
  *(undefined4 *)((long)puVar4 + 0xbfc4) = extraout_XMM0_Dd_x00616;
  puVar4[-0x346] = 0x8f94b9;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1806];
  *puVar1 = extraout_XMM0_Da_x00617;
  puVar1[1] = extraout_XMM0_Db_x00617;
  puVar1[2] = extraout_XMM0_Dc_x00617;
  puVar1[3] = extraout_XMM0_Dd_x00617;
  puVar4[-0x346] = 0x8f94d9;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x17fe];
  *puVar1 = extraout_XMM0_Da_x00618;
  puVar1[1] = extraout_XMM0_Db_x00618;
  puVar1[2] = extraout_XMM0_Dc_x00618;
  puVar1[3] = extraout_XMM0_Dd_x00618;
  puVar4[0x2d3] = puVar4[0x1df5];
  puVar4[0x2d4] = puVar4[0x1df6];
  puVar4[0x2d5] = puVar4[0x1df3];
  puVar4[0x2d6] = puVar4[0x1df4];
  puVar4[0x2d7] = puVar4[0x1df1];
  puVar4[0x2d8] = puVar4[0x1df2];
  puVar4[0x2d9] = puVar4[0x1dfd];
  puVar4[0x2da] = puVar4[0x1dfe];
  puVar4[0x2db] = puVar4[0x1dfb];
  puVar4[0x2dc] = puVar4[0x1dfc];
  puVar4[0x2dd] = puVar4[0x1df9];
  puVar4[0x2de] = puVar4[0x1dfa];
  puVar4[-0x346] = 0x8f9550;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x17f5] = puVar4[0x2d3];
  puVar4[0x17f6] = puVar4[0x2d4];
  puVar4[0x17f3] = puVar4[0x2d5];
  puVar4[0x17f4] = puVar4[0x2d6];
  puVar4[0x17f1] = puVar4[0x2d7];
  puVar4[0x17f2] = puVar4[0x2d8];
  puVar4[0x17f0] = puVar4[0xcae];
  puVar4[0x17ed] = puVar4[0x2d9];
  puVar4[0x17ee] = puVar4[0x2da];
  puVar4[0x17eb] = puVar4[0x2db];
  puVar4[0x17ec] = puVar4[0x2dc];
  puVar4[0x17e9] = puVar4[0x2dd];
  puVar4[0x17ea] = puVar4[0x2de];
  puVar4[0x17e8] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x17e5) = extraout_XMM0_Da_x00619;
  *(undefined4 *)((long)puVar4 + 0xbf2c) = extraout_XMM0_Db_x00619;
  *(undefined4 *)(puVar4 + 0x17e6) = extraout_XMM0_Dc_x00619;
  *(undefined4 *)((long)puVar4 + 0xbf34) = extraout_XMM0_Dd_x00619;
  uVar2 = ((undefined8 *)puVar4[0x17e8])[1];
  puVar4[0x2e1] = *(undefined8 *)puVar4[0x17e8];
  puVar4[0x2e2] = uVar2;
  puVar4[-0x346] = 0x8f95f8;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x2df) = extraout_XMM0_Da_x00620;
  *(undefined4 *)((long)puVar4 + 0x16fc) = extraout_XMM0_Db_x00620;
  *(undefined4 *)(puVar4 + 0x2e0) = extraout_XMM0_Dc_x00620;
  *(undefined4 *)((long)puVar4 + 0x1704) = extraout_XMM0_Dd_x00620;
  puVar4[-0x346] = 0x8f961d;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f963d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x17e3) = extraout_XMM0_Da_x00621;
  *(undefined4 *)((long)puVar4 + 0xbf1c) = extraout_XMM0_Db_x00621;
  *(undefined4 *)(puVar4 + 0x17e4) = extraout_XMM0_Dc_x00621;
  *(undefined4 *)((long)puVar4 + 0xbf24) = extraout_XMM0_Dd_x00621;
  puVar4[-0x346] = 0x8f9652;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x2e3) = extraout_XMM0_Da_x00622;
  *(undefined4 *)((long)puVar4 + 0x171c) = extraout_XMM0_Db_x00622;
  *(undefined4 *)(puVar4 + 0x2e4) = extraout_XMM0_Dc_x00622;
  *(undefined4 *)((long)puVar4 + 0x1724) = extraout_XMM0_Dd_x00622;
  puVar4[-0x346] = 0x8f9677;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f9687;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x17e1) = extraout_XMM0_Da_x00623;
  *(undefined4 *)((long)puVar4 + 0xbf0c) = extraout_XMM0_Db_x00623;
  *(undefined4 *)(puVar4 + 0x17e2) = extraout_XMM0_Dc_x00623;
  *(undefined4 *)((long)puVar4 + 0xbf14) = extraout_XMM0_Dd_x00623;
  puVar4[-0x346] = 0x8f96a7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x17f0];
  *puVar1 = extraout_XMM0_Da_x00624;
  puVar1[1] = extraout_XMM0_Db_x00624;
  puVar1[2] = extraout_XMM0_Dc_x00624;
  puVar1[3] = extraout_XMM0_Dd_x00624;
  puVar4[-0x346] = 0x8f96c7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x17e8];
  *puVar1 = extraout_XMM0_Da_x00625;
  puVar1[1] = extraout_XMM0_Db_x00625;
  puVar1[2] = extraout_XMM0_Dc_x00625;
  puVar1[3] = extraout_XMM0_Dd_x00625;
  puVar4[0x2e5] = puVar4[0x1df7];
  puVar4[0x2e6] = puVar4[0x1df8];
  puVar4[0x2e7] = puVar4[0x1df5];
  puVar4[0x2e8] = puVar4[0x1df6];
  puVar4[0x2e9] = puVar4[0x1df3];
  puVar4[0x2ea] = puVar4[0x1df4];
  puVar4[0x2eb] = puVar4[0x1def];
  puVar4[0x2ec] = puVar4[0x1df0];
  puVar4[0x2ed] = puVar4[0x1dfd];
  puVar4[0x2ee] = puVar4[0x1dfe];
  puVar4[0x2ef] = puVar4[0x1dfb];
  puVar4[0x2f0] = puVar4[0x1dfc];
  puVar4[-0x346] = 0x8f973e;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x17df] = puVar4[0x2e5];
  puVar4[0x17e0] = puVar4[0x2e6];
  puVar4[0x17dd] = puVar4[0x2e7];
  puVar4[0x17de] = puVar4[0x2e8];
  puVar4[0x17db] = puVar4[0x2e9];
  puVar4[0x17dc] = puVar4[0x2ea];
  puVar4[0x17da] = puVar4[0xccc];
  puVar4[0x17d7] = puVar4[0x2eb];
  puVar4[0x17d8] = puVar4[0x2ec];
  puVar4[0x17d5] = puVar4[0x2ed];
  puVar4[0x17d6] = puVar4[0x2ee];
  puVar4[0x17d3] = puVar4[0x2ef];
  puVar4[0x17d4] = puVar4[0x2f0];
  puVar4[0x17d2] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x17cf) = extraout_XMM0_Da_x00626;
  *(undefined4 *)((long)puVar4 + 0xbe7c) = extraout_XMM0_Db_x00626;
  *(undefined4 *)(puVar4 + 0x17d0) = extraout_XMM0_Dc_x00626;
  *(undefined4 *)((long)puVar4 + 0xbe84) = extraout_XMM0_Dd_x00626;
  uVar2 = ((undefined8 *)puVar4[0x17d2])[1];
  puVar4[0x2f3] = *(undefined8 *)puVar4[0x17d2];
  puVar4[0x2f4] = uVar2;
  puVar4[-0x346] = 0x8f97e6;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x2f1) = extraout_XMM0_Da_x00627;
  *(undefined4 *)((long)puVar4 + 0x178c) = extraout_XMM0_Db_x00627;
  *(undefined4 *)(puVar4 + 0x2f2) = extraout_XMM0_Dc_x00627;
  *(undefined4 *)((long)puVar4 + 0x1794) = extraout_XMM0_Dd_x00627;
  puVar4[-0x346] = 0x8f980b;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f982b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x17cd) = extraout_XMM0_Da_x00628;
  *(undefined4 *)((long)puVar4 + 0xbe6c) = extraout_XMM0_Db_x00628;
  *(undefined4 *)(puVar4 + 0x17ce) = extraout_XMM0_Dc_x00628;
  *(undefined4 *)((long)puVar4 + 0xbe74) = extraout_XMM0_Dd_x00628;
  puVar4[-0x346] = 0x8f9840;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x2f5) = extraout_XMM0_Da_x00629;
  *(undefined4 *)((long)puVar4 + 0x17ac) = extraout_XMM0_Db_x00629;
  *(undefined4 *)(puVar4 + 0x2f6) = extraout_XMM0_Dc_x00629;
  *(undefined4 *)((long)puVar4 + 0x17b4) = extraout_XMM0_Dd_x00629;
  puVar4[-0x346] = 0x8f9865;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f9875;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x17cb) = extraout_XMM0_Da_x00630;
  *(undefined4 *)((long)puVar4 + 0xbe5c) = extraout_XMM0_Db_x00630;
  *(undefined4 *)(puVar4 + 0x17cc) = extraout_XMM0_Dc_x00630;
  *(undefined4 *)((long)puVar4 + 0xbe64) = extraout_XMM0_Dd_x00630;
  puVar4[-0x346] = 0x8f9895;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x17da];
  *puVar1 = extraout_XMM0_Da_x00631;
  puVar1[1] = extraout_XMM0_Db_x00631;
  puVar1[2] = extraout_XMM0_Dc_x00631;
  puVar1[3] = extraout_XMM0_Dd_x00631;
  puVar4[-0x346] = 0x8f98b5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x17d2];
  *puVar1 = extraout_XMM0_Da_x00632;
  puVar1[1] = extraout_XMM0_Db_x00632;
  puVar1[2] = extraout_XMM0_Dc_x00632;
  puVar1[3] = extraout_XMM0_Dd_x00632;
  puVar4[0x2f7] = puVar4[0x1df9];
  puVar4[0x2f8] = puVar4[0x1dfa];
  puVar4[0x2f9] = puVar4[0x1df7];
  puVar4[0x2fa] = puVar4[0x1df8];
  puVar4[0x2fb] = puVar4[0x1df5];
  puVar4[0x2fc] = puVar4[0x1df6];
  puVar4[0x2fd] = puVar4[0x1df1];
  puVar4[0x2fe] = puVar4[0x1df2];
  puVar4[0x2ff] = puVar4[0x1def];
  puVar4[0x300] = puVar4[0x1df0];
  puVar4[0x301] = puVar4[0x1dfd];
  puVar4[0x302] = puVar4[0x1dfe];
  puVar4[-0x346] = 0x8f992c;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x17c9] = puVar4[0x2f7];
  puVar4[0x17ca] = puVar4[0x2f8];
  puVar4[0x17c7] = puVar4[0x2f9];
  puVar4[0x17c8] = puVar4[0x2fa];
  puVar4[0x17c5] = puVar4[0x2fb];
  puVar4[0x17c6] = puVar4[0x2fc];
  puVar4[0x17c4] = puVar4[0xcec];
  puVar4[0x17c1] = puVar4[0x2fd];
  puVar4[0x17c2] = puVar4[0x2fe];
  puVar4[0x17bf] = puVar4[0x2ff];
  puVar4[0x17c0] = puVar4[0x300];
  puVar4[0x17bd] = puVar4[0x301];
  puVar4[0x17be] = puVar4[0x302];
  puVar4[0x17bc] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x17b9) = extraout_XMM0_Da_x00633;
  *(undefined4 *)((long)puVar4 + 0xbdcc) = extraout_XMM0_Db_x00633;
  *(undefined4 *)(puVar4 + 0x17ba) = extraout_XMM0_Dc_x00633;
  *(undefined4 *)((long)puVar4 + 0xbdd4) = extraout_XMM0_Dd_x00633;
  uVar2 = ((undefined8 *)puVar4[0x17bc])[1];
  puVar4[0x305] = *(undefined8 *)puVar4[0x17bc];
  puVar4[0x306] = uVar2;
  puVar4[-0x346] = 0x8f99d4;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x303) = extraout_XMM0_Da_x00634;
  *(undefined4 *)((long)puVar4 + 0x181c) = extraout_XMM0_Db_x00634;
  *(undefined4 *)(puVar4 + 0x304) = extraout_XMM0_Dc_x00634;
  *(undefined4 *)((long)puVar4 + 0x1824) = extraout_XMM0_Dd_x00634;
  puVar4[-0x346] = 0x8f99f9;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f9a19;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x17b7) = extraout_XMM0_Da_x00635;
  *(undefined4 *)((long)puVar4 + 0xbdbc) = extraout_XMM0_Db_x00635;
  *(undefined4 *)(puVar4 + 0x17b8) = extraout_XMM0_Dc_x00635;
  *(undefined4 *)((long)puVar4 + 0xbdc4) = extraout_XMM0_Dd_x00635;
  puVar4[-0x346] = 0x8f9a2e;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x307) = extraout_XMM0_Da_x00636;
  *(undefined4 *)((long)puVar4 + 0x183c) = extraout_XMM0_Db_x00636;
  *(undefined4 *)(puVar4 + 0x308) = extraout_XMM0_Dc_x00636;
  *(undefined4 *)((long)puVar4 + 0x1844) = extraout_XMM0_Dd_x00636;
  puVar4[-0x346] = 0x8f9a53;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f9a63;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x17b5) = extraout_XMM0_Da_x00637;
  *(undefined4 *)((long)puVar4 + 0xbdac) = extraout_XMM0_Db_x00637;
  *(undefined4 *)(puVar4 + 0x17b6) = extraout_XMM0_Dc_x00637;
  *(undefined4 *)((long)puVar4 + 0xbdb4) = extraout_XMM0_Dd_x00637;
  puVar4[-0x346] = 0x8f9a83;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x17c4];
  *puVar1 = extraout_XMM0_Da_x00638;
  puVar1[1] = extraout_XMM0_Db_x00638;
  puVar1[2] = extraout_XMM0_Dc_x00638;
  puVar1[3] = extraout_XMM0_Dd_x00638;
  puVar4[-0x346] = 0x8f9aa3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x17bc];
  *puVar1 = extraout_XMM0_Da_x00639;
  puVar1[1] = extraout_XMM0_Db_x00639;
  puVar1[2] = extraout_XMM0_Dc_x00639;
  puVar1[3] = extraout_XMM0_Dd_x00639;
  puVar4[0x309] = puVar4[0x1dfb];
  puVar4[0x30a] = puVar4[0x1dfc];
  puVar4[0x30b] = puVar4[0x1df9];
  puVar4[0x30c] = puVar4[0x1dfa];
  puVar4[0x30d] = puVar4[0x1df7];
  puVar4[0x30e] = puVar4[0x1df8];
  puVar4[0x30f] = puVar4[0x1df3];
  puVar4[0x310] = puVar4[0x1df4];
  puVar4[0x311] = puVar4[0x1df1];
  puVar4[0x312] = puVar4[0x1df2];
  puVar4[0x313] = puVar4[0x1def];
  puVar4[0x314] = puVar4[0x1df0];
  puVar4[-0x346] = 0x8f9b1a;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x17b3] = puVar4[0x309];
  puVar4[0x17b4] = puVar4[0x30a];
  puVar4[0x17b1] = puVar4[0x30b];
  puVar4[0x17b2] = puVar4[0x30c];
  puVar4[0x17af] = puVar4[0x30d];
  puVar4[0x17b0] = puVar4[0x30e];
  puVar4[0x17ae] = puVar4[0xd0c];
  puVar4[0x17ab] = puVar4[0x30f];
  puVar4[0x17ac] = puVar4[0x310];
  puVar4[0x17a9] = puVar4[0x311];
  puVar4[0x17aa] = puVar4[0x312];
  puVar4[0x17a7] = puVar4[0x313];
  puVar4[0x17a8] = puVar4[0x314];
  puVar4[0x17a6] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x17a3) = extraout_XMM0_Da_x00640;
  *(undefined4 *)((long)puVar4 + 0xbd1c) = extraout_XMM0_Db_x00640;
  *(undefined4 *)(puVar4 + 0x17a4) = extraout_XMM0_Dc_x00640;
  *(undefined4 *)((long)puVar4 + 0xbd24) = extraout_XMM0_Dd_x00640;
  uVar2 = ((undefined8 *)puVar4[0x17a6])[1];
  puVar4[0x317] = *(undefined8 *)puVar4[0x17a6];
  puVar4[0x318] = uVar2;
  puVar4[-0x346] = 0x8f9bc2;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x315) = extraout_XMM0_Da_x00641;
  *(undefined4 *)((long)puVar4 + 0x18ac) = extraout_XMM0_Db_x00641;
  *(undefined4 *)(puVar4 + 0x316) = extraout_XMM0_Dc_x00641;
  *(undefined4 *)((long)puVar4 + 0x18b4) = extraout_XMM0_Dd_x00641;
  puVar4[-0x346] = 0x8f9be7;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f9c07;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x17a1) = extraout_XMM0_Da_x00642;
  *(undefined4 *)((long)puVar4 + 0xbd0c) = extraout_XMM0_Db_x00642;
  *(undefined4 *)(puVar4 + 0x17a2) = extraout_XMM0_Dc_x00642;
  *(undefined4 *)((long)puVar4 + 0xbd14) = extraout_XMM0_Dd_x00642;
  puVar4[-0x346] = 0x8f9c1c;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x319) = extraout_XMM0_Da_x00643;
  *(undefined4 *)((long)puVar4 + 0x18cc) = extraout_XMM0_Db_x00643;
  *(undefined4 *)(puVar4 + 0x31a) = extraout_XMM0_Dc_x00643;
  *(undefined4 *)((long)puVar4 + 0x18d4) = extraout_XMM0_Dd_x00643;
  puVar4[-0x346] = 0x8f9c41;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f9c51;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x179f) = extraout_XMM0_Da_x00644;
  *(undefined4 *)((long)puVar4 + 0xbcfc) = extraout_XMM0_Db_x00644;
  *(undefined4 *)(puVar4 + 0x17a0) = extraout_XMM0_Dc_x00644;
  *(undefined4 *)((long)puVar4 + 0xbd04) = extraout_XMM0_Dd_x00644;
  puVar4[-0x346] = 0x8f9c71;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x17ae];
  *puVar1 = extraout_XMM0_Da_x00645;
  puVar1[1] = extraout_XMM0_Db_x00645;
  puVar1[2] = extraout_XMM0_Dc_x00645;
  puVar1[3] = extraout_XMM0_Dd_x00645;
  puVar4[-0x346] = 0x8f9c91;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x17a6];
  *puVar1 = extraout_XMM0_Da_x00646;
  puVar1[1] = extraout_XMM0_Db_x00646;
  puVar1[2] = extraout_XMM0_Dc_x00646;
  puVar1[3] = extraout_XMM0_Dd_x00646;
  puVar4[0x31d] = puVar4[0x1dfd];
  puVar4[0x31e] = puVar4[0x1dfe];
  puVar4[799] = puVar4[0x1dfb];
  puVar4[800] = puVar4[0x1dfc];
  puVar4[0x321] = puVar4[0x1df9];
  puVar4[0x322] = puVar4[0x1dfa];
  puVar4[0x323] = puVar4[0x1df5];
  puVar4[0x324] = puVar4[0x1df6];
  puVar4[0x325] = puVar4[0x1df3];
  puVar4[0x326] = puVar4[0x1df4];
  puVar4[0x327] = puVar4[0x1df1];
  puVar4[0x328] = puVar4[0x1df2];
  puVar4[-0x346] = 0x8f9d08;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x179d] = puVar4[0x31d];
  puVar4[0x179e] = puVar4[0x31e];
  puVar4[0x179b] = puVar4[799];
  puVar4[0x179c] = puVar4[800];
  puVar4[0x1799] = puVar4[0x321];
  puVar4[0x179a] = puVar4[0x322];
  puVar4[0x1798] = puVar4[0xcb6];
  puVar4[0x1795] = puVar4[0x323];
  puVar4[0x1796] = puVar4[0x324];
  puVar4[0x1793] = puVar4[0x325];
  puVar4[0x1794] = puVar4[0x326];
  puVar4[0x1791] = puVar4[0x327];
  puVar4[0x1792] = puVar4[0x328];
  puVar4[0x1790] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x178d) = extraout_XMM0_Da_x00647;
  *(undefined4 *)((long)puVar4 + 0xbc6c) = extraout_XMM0_Db_x00647;
  *(undefined4 *)(puVar4 + 0x178e) = extraout_XMM0_Dc_x00647;
  *(undefined4 *)((long)puVar4 + 0xbc74) = extraout_XMM0_Dd_x00647;
  uVar2 = ((undefined8 *)puVar4[0x1790])[1];
  puVar4[0x32b] = *(undefined8 *)puVar4[0x1790];
  puVar4[0x32c] = uVar2;
  puVar4[-0x346] = 0x8f9db0;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x329) = extraout_XMM0_Da_x00648;
  *(undefined4 *)((long)puVar4 + 0x194c) = extraout_XMM0_Db_x00648;
  *(undefined4 *)(puVar4 + 0x32a) = extraout_XMM0_Dc_x00648;
  *(undefined4 *)((long)puVar4 + 0x1954) = extraout_XMM0_Dd_x00648;
  puVar4[-0x346] = 0x8f9dd5;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f9df5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x178b) = extraout_XMM0_Da_x00649;
  *(undefined4 *)((long)puVar4 + 0xbc5c) = extraout_XMM0_Db_x00649;
  *(undefined4 *)(puVar4 + 0x178c) = extraout_XMM0_Dc_x00649;
  *(undefined4 *)((long)puVar4 + 0xbc64) = extraout_XMM0_Dd_x00649;
  puVar4[-0x346] = 0x8f9e0a;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x32d) = extraout_XMM0_Da_x00650;
  *(undefined4 *)((long)puVar4 + 0x196c) = extraout_XMM0_Db_x00650;
  *(undefined4 *)(puVar4 + 0x32e) = extraout_XMM0_Dc_x00650;
  *(undefined4 *)((long)puVar4 + 0x1974) = extraout_XMM0_Dd_x00650;
  puVar4[-0x346] = 0x8f9e2f;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f9e3f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1789) = extraout_XMM0_Da_x00651;
  *(undefined4 *)((long)puVar4 + 0xbc4c) = extraout_XMM0_Db_x00651;
  *(undefined4 *)(puVar4 + 0x178a) = extraout_XMM0_Dc_x00651;
  *(undefined4 *)((long)puVar4 + 0xbc54) = extraout_XMM0_Dd_x00651;
  puVar4[-0x346] = 0x8f9e5f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1798];
  *puVar1 = extraout_XMM0_Da_x00652;
  puVar1[1] = extraout_XMM0_Db_x00652;
  puVar1[2] = extraout_XMM0_Dc_x00652;
  puVar1[3] = extraout_XMM0_Dd_x00652;
  puVar4[-0x346] = 0x8f9e7f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1790];
  *puVar1 = extraout_XMM0_Da_x00653;
  puVar1[1] = extraout_XMM0_Db_x00653;
  puVar1[2] = extraout_XMM0_Dc_x00653;
  puVar1[3] = extraout_XMM0_Dd_x00653;
  puVar4[0x32f] = puVar4[0x1def];
  puVar4[0x330] = puVar4[0x1df0];
  puVar4[0x331] = puVar4[0x1dfd];
  puVar4[0x332] = puVar4[0x1dfe];
  puVar4[0x333] = puVar4[0x1dfb];
  puVar4[0x334] = puVar4[0x1dfc];
  puVar4[0x335] = puVar4[0x1df7];
  puVar4[0x336] = puVar4[0x1df8];
  puVar4[0x337] = puVar4[0x1df5];
  puVar4[0x338] = puVar4[0x1df6];
  puVar4[0x339] = puVar4[0x1df3];
  puVar4[0x33a] = puVar4[0x1df4];
  puVar4[-0x346] = 0x8f9ef6;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1787] = puVar4[0x32f];
  puVar4[0x1788] = puVar4[0x330];
  puVar4[0x1785] = puVar4[0x331];
  puVar4[0x1786] = puVar4[0x332];
  puVar4[0x1783] = puVar4[0x333];
  puVar4[0x1784] = puVar4[0x334];
  puVar4[0x1782] = puVar4[0xcd4];
  puVar4[0x177f] = puVar4[0x335];
  puVar4[0x1780] = puVar4[0x336];
  puVar4[0x177d] = puVar4[0x337];
  puVar4[0x177e] = puVar4[0x338];
  puVar4[0x177b] = puVar4[0x339];
  puVar4[0x177c] = puVar4[0x33a];
  puVar4[0x177a] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x1777) = extraout_XMM0_Da_x00654;
  *(undefined4 *)((long)puVar4 + 0xbbbc) = extraout_XMM0_Db_x00654;
  *(undefined4 *)(puVar4 + 0x1778) = extraout_XMM0_Dc_x00654;
  *(undefined4 *)((long)puVar4 + 0xbbc4) = extraout_XMM0_Dd_x00654;
  uVar2 = ((undefined8 *)puVar4[0x177a])[1];
  puVar4[0x33d] = *(undefined8 *)puVar4[0x177a];
  puVar4[0x33e] = uVar2;
  puVar4[-0x346] = 0x8f9f9e;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x33b) = extraout_XMM0_Da_x00655;
  *(undefined4 *)((long)puVar4 + 0x19dc) = extraout_XMM0_Db_x00655;
  *(undefined4 *)(puVar4 + 0x33c) = extraout_XMM0_Dc_x00655;
  *(undefined4 *)((long)puVar4 + 0x19e4) = extraout_XMM0_Dd_x00655;
  puVar4[-0x346] = 0x8f9fc3;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8f9fe3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1775) = extraout_XMM0_Da_x00656;
  *(undefined4 *)((long)puVar4 + 0xbbac) = extraout_XMM0_Db_x00656;
  *(undefined4 *)(puVar4 + 0x1776) = extraout_XMM0_Dc_x00656;
  *(undefined4 *)((long)puVar4 + 0xbbb4) = extraout_XMM0_Dd_x00656;
  puVar4[-0x346] = 0x8f9ff8;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x33f) = extraout_XMM0_Da_x00657;
  *(undefined4 *)((long)puVar4 + 0x19fc) = extraout_XMM0_Db_x00657;
  *(undefined4 *)(puVar4 + 0x340) = extraout_XMM0_Dc_x00657;
  *(undefined4 *)((long)puVar4 + 0x1a04) = extraout_XMM0_Dd_x00657;
  puVar4[-0x346] = 0x8fa01d;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fa02d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1773) = extraout_XMM0_Da_x00658;
  *(undefined4 *)((long)puVar4 + 0xbb9c) = extraout_XMM0_Db_x00658;
  *(undefined4 *)(puVar4 + 0x1774) = extraout_XMM0_Dc_x00658;
  *(undefined4 *)((long)puVar4 + 0xbba4) = extraout_XMM0_Dd_x00658;
  puVar4[-0x346] = 0x8fa04d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1782];
  *puVar1 = extraout_XMM0_Da_x00659;
  puVar1[1] = extraout_XMM0_Db_x00659;
  puVar1[2] = extraout_XMM0_Dc_x00659;
  puVar1[3] = extraout_XMM0_Dd_x00659;
  puVar4[-0x346] = 0x8fa06d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x177a];
  *puVar1 = extraout_XMM0_Da_x00660;
  puVar1[1] = extraout_XMM0_Db_x00660;
  puVar1[2] = extraout_XMM0_Dc_x00660;
  puVar1[3] = extraout_XMM0_Dd_x00660;
  puVar4[0x341] = puVar4[0x1df1];
  puVar4[0x342] = puVar4[0x1df2];
  puVar4[0x343] = puVar4[0x1def];
  puVar4[0x344] = puVar4[0x1df0];
  puVar4[0x345] = puVar4[0x1dfd];
  puVar4[0x346] = puVar4[0x1dfe];
  puVar4[0x347] = puVar4[0x1df9];
  puVar4[0x348] = puVar4[0x1dfa];
  puVar4[0x349] = puVar4[0x1df7];
  puVar4[0x34a] = puVar4[0x1df8];
  puVar4[0x34b] = puVar4[0x1df5];
  puVar4[0x34c] = puVar4[0x1df6];
  puVar4[-0x346] = 0x8fa0e4;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1771] = puVar4[0x341];
  puVar4[0x1772] = puVar4[0x342];
  puVar4[5999] = puVar4[0x343];
  puVar4[6000] = puVar4[0x344];
  puVar4[0x176d] = puVar4[0x345];
  puVar4[0x176e] = puVar4[0x346];
  puVar4[0x176c] = puVar4[0xcf4];
  puVar4[0x1769] = puVar4[0x347];
  puVar4[0x176a] = puVar4[0x348];
  puVar4[0x1767] = puVar4[0x349];
  puVar4[0x1768] = puVar4[0x34a];
  puVar4[0x1765] = puVar4[0x34b];
  puVar4[0x1766] = puVar4[0x34c];
  puVar4[0x1764] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x1761) = extraout_XMM0_Da_x00661;
  *(undefined4 *)((long)puVar4 + 0xbb0c) = extraout_XMM0_Db_x00661;
  *(undefined4 *)(puVar4 + 0x1762) = extraout_XMM0_Dc_x00661;
  *(undefined4 *)((long)puVar4 + 0xbb14) = extraout_XMM0_Dd_x00661;
  uVar2 = ((undefined8 *)puVar4[0x1764])[1];
  puVar4[0x34f] = *(undefined8 *)puVar4[0x1764];
  puVar4[0x350] = uVar2;
  puVar4[-0x346] = 0x8fa18c;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x34d) = extraout_XMM0_Da_x00662;
  *(undefined4 *)((long)puVar4 + 0x1a6c) = extraout_XMM0_Db_x00662;
  *(undefined4 *)(puVar4 + 0x34e) = extraout_XMM0_Dc_x00662;
  *(undefined4 *)((long)puVar4 + 0x1a74) = extraout_XMM0_Dd_x00662;
  puVar4[-0x346] = 0x8fa1b1;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fa1d1;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x175f) = extraout_XMM0_Da_x00663;
  *(undefined4 *)((long)puVar4 + 0xbafc) = extraout_XMM0_Db_x00663;
  *(undefined4 *)(puVar4 + 0x1760) = extraout_XMM0_Dc_x00663;
  *(undefined4 *)((long)puVar4 + 0xbb04) = extraout_XMM0_Dd_x00663;
  puVar4[-0x346] = 0x8fa1e6;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x351) = extraout_XMM0_Da_x00664;
  *(undefined4 *)((long)puVar4 + 0x1a8c) = extraout_XMM0_Db_x00664;
  *(undefined4 *)(puVar4 + 0x352) = extraout_XMM0_Dc_x00664;
  *(undefined4 *)((long)puVar4 + 0x1a94) = extraout_XMM0_Dd_x00664;
  puVar4[-0x346] = 0x8fa20b;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fa21b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x175d) = extraout_XMM0_Da_x00665;
  *(undefined4 *)((long)puVar4 + 0xbaec) = extraout_XMM0_Db_x00665;
  *(undefined4 *)(puVar4 + 0x175e) = extraout_XMM0_Dc_x00665;
  *(undefined4 *)((long)puVar4 + 0xbaf4) = extraout_XMM0_Dd_x00665;
  puVar4[-0x346] = 0x8fa23b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x176c];
  *puVar1 = extraout_XMM0_Da_x00666;
  puVar1[1] = extraout_XMM0_Db_x00666;
  puVar1[2] = extraout_XMM0_Dc_x00666;
  puVar1[3] = extraout_XMM0_Dd_x00666;
  puVar4[-0x346] = 0x8fa25b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1764];
  *puVar1 = extraout_XMM0_Da_x00667;
  puVar1[1] = extraout_XMM0_Db_x00667;
  puVar1[2] = extraout_XMM0_Dc_x00667;
  puVar1[3] = extraout_XMM0_Dd_x00667;
  puVar4[0x353] = puVar4[0x1df3];
  puVar4[0x354] = puVar4[0x1df4];
  puVar4[0x355] = puVar4[0x1df1];
  puVar4[0x356] = puVar4[0x1df2];
  puVar4[0x357] = puVar4[0x1def];
  puVar4[0x358] = puVar4[0x1df0];
  puVar4[0x359] = puVar4[0x1dfb];
  puVar4[0x35a] = puVar4[0x1dfc];
  puVar4[0x35b] = puVar4[0x1df9];
  puVar4[0x35c] = puVar4[0x1dfa];
  puVar4[0x35d] = puVar4[0x1df7];
  puVar4[0x35e] = puVar4[0x1df8];
  puVar4[-0x346] = 0x8fa2d2;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x175b] = puVar4[0x353];
  puVar4[0x175c] = puVar4[0x354];
  puVar4[0x1759] = puVar4[0x355];
  puVar4[0x175a] = puVar4[0x356];
  puVar4[0x1757] = puVar4[0x357];
  puVar4[0x1758] = puVar4[0x358];
  puVar4[0x1756] = puVar4[0xd14];
  puVar4[0x1753] = puVar4[0x359];
  puVar4[0x1754] = puVar4[0x35a];
  puVar4[0x1751] = puVar4[0x35b];
  puVar4[0x1752] = puVar4[0x35c];
  puVar4[0x174f] = puVar4[0x35d];
  puVar4[0x1750] = puVar4[0x35e];
  puVar4[0x174e] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x174b) = extraout_XMM0_Da_x00668;
  *(undefined4 *)((long)puVar4 + 0xba5c) = extraout_XMM0_Db_x00668;
  *(undefined4 *)(puVar4 + 0x174c) = extraout_XMM0_Dc_x00668;
  *(undefined4 *)((long)puVar4 + 0xba64) = extraout_XMM0_Dd_x00668;
  uVar2 = ((undefined8 *)puVar4[0x174e])[1];
  puVar4[0x361] = *(undefined8 *)puVar4[0x174e];
  puVar4[0x362] = uVar2;
  puVar4[-0x346] = 0x8fa37a;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x35f) = extraout_XMM0_Da_x00669;
  *(undefined4 *)((long)puVar4 + 0x1afc) = extraout_XMM0_Db_x00669;
  *(undefined4 *)(puVar4 + 0x360) = extraout_XMM0_Dc_x00669;
  *(undefined4 *)((long)puVar4 + 0x1b04) = extraout_XMM0_Dd_x00669;
  puVar4[-0x346] = 0x8fa39f;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fa3bf;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1749) = extraout_XMM0_Da_x00670;
  *(undefined4 *)((long)puVar4 + 0xba4c) = extraout_XMM0_Db_x00670;
  *(undefined4 *)(puVar4 + 0x174a) = extraout_XMM0_Dc_x00670;
  *(undefined4 *)((long)puVar4 + 0xba54) = extraout_XMM0_Dd_x00670;
  puVar4[-0x346] = 0x8fa3d4;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x363) = extraout_XMM0_Da_x00671;
  *(undefined4 *)((long)puVar4 + 0x1b1c) = extraout_XMM0_Db_x00671;
  *(undefined4 *)(puVar4 + 0x364) = extraout_XMM0_Dc_x00671;
  *(undefined4 *)((long)puVar4 + 0x1b24) = extraout_XMM0_Dd_x00671;
  puVar4[-0x346] = 0x8fa3f9;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fa409;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1747) = extraout_XMM0_Da_x00672;
  *(undefined4 *)((long)puVar4 + 0xba3c) = extraout_XMM0_Db_x00672;
  *(undefined4 *)(puVar4 + 0x1748) = extraout_XMM0_Dc_x00672;
  *(undefined4 *)((long)puVar4 + 0xba44) = extraout_XMM0_Dd_x00672;
  puVar4[-0x346] = 0x8fa429;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1756];
  *puVar1 = extraout_XMM0_Da_x00673;
  puVar1[1] = extraout_XMM0_Db_x00673;
  puVar1[2] = extraout_XMM0_Dc_x00673;
  puVar1[3] = extraout_XMM0_Dd_x00673;
  puVar4[-0x346] = 0x8fa449;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x174e];
  *puVar1 = extraout_XMM0_Da_x00674;
  puVar1[1] = extraout_XMM0_Db_x00674;
  puVar1[2] = extraout_XMM0_Dc_x00674;
  puVar1[3] = extraout_XMM0_Dd_x00674;
  puVar4[0x365] = puVar4[0x1df5];
  puVar4[0x366] = puVar4[0x1df6];
  puVar4[0x367] = puVar4[0x1df3];
  puVar4[0x368] = puVar4[0x1df4];
  puVar4[0x369] = puVar4[0x1df1];
  puVar4[0x36a] = puVar4[0x1df2];
  puVar4[0x36b] = puVar4[0x1dfd];
  puVar4[0x36c] = puVar4[0x1dfe];
  puVar4[0x36d] = puVar4[0x1dfb];
  puVar4[0x36e] = puVar4[0x1dfc];
  puVar4[0x36f] = puVar4[0x1df9];
  puVar4[0x370] = puVar4[0x1dfa];
  puVar4[-0x346] = 0x8fa4c0;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1745] = puVar4[0x365];
  puVar4[0x1746] = puVar4[0x366];
  puVar4[0x1743] = puVar4[0x367];
  puVar4[0x1744] = puVar4[0x368];
  puVar4[0x1741] = puVar4[0x369];
  puVar4[0x1742] = puVar4[0x36a];
  puVar4[0x1740] = puVar4[0xcae];
  puVar4[0x173d] = puVar4[0x36b];
  puVar4[0x173e] = puVar4[0x36c];
  puVar4[0x173b] = puVar4[0x36d];
  puVar4[0x173c] = puVar4[0x36e];
  puVar4[0x1739] = puVar4[0x36f];
  puVar4[0x173a] = puVar4[0x370];
  puVar4[0x1738] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x1735) = extraout_XMM0_Da_x00675;
  *(undefined4 *)((long)puVar4 + 0xb9ac) = extraout_XMM0_Db_x00675;
  *(undefined4 *)(puVar4 + 0x1736) = extraout_XMM0_Dc_x00675;
  *(undefined4 *)((long)puVar4 + 0xb9b4) = extraout_XMM0_Dd_x00675;
  uVar2 = ((undefined8 *)puVar4[0x1738])[1];
  puVar4[0x373] = *(undefined8 *)puVar4[0x1738];
  puVar4[0x374] = uVar2;
  puVar4[-0x346] = 0x8fa568;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x371) = extraout_XMM0_Da_x00676;
  *(undefined4 *)((long)puVar4 + 0x1b8c) = extraout_XMM0_Db_x00676;
  *(undefined4 *)(puVar4 + 0x372) = extraout_XMM0_Dc_x00676;
  *(undefined4 *)((long)puVar4 + 0x1b94) = extraout_XMM0_Dd_x00676;
  puVar4[-0x346] = 0x8fa58d;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fa5ad;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1733) = extraout_XMM0_Da_x00677;
  *(undefined4 *)((long)puVar4 + 0xb99c) = extraout_XMM0_Db_x00677;
  *(undefined4 *)(puVar4 + 0x1734) = extraout_XMM0_Dc_x00677;
  *(undefined4 *)((long)puVar4 + 0xb9a4) = extraout_XMM0_Dd_x00677;
  puVar4[-0x346] = 0x8fa5c2;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x375) = extraout_XMM0_Da_x00678;
  *(undefined4 *)((long)puVar4 + 0x1bac) = extraout_XMM0_Db_x00678;
  *(undefined4 *)(puVar4 + 0x376) = extraout_XMM0_Dc_x00678;
  *(undefined4 *)((long)puVar4 + 0x1bb4) = extraout_XMM0_Dd_x00678;
  puVar4[-0x346] = 0x8fa5e7;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fa5f7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1731) = extraout_XMM0_Da_x00679;
  *(undefined4 *)((long)puVar4 + 0xb98c) = extraout_XMM0_Db_x00679;
  *(undefined4 *)(puVar4 + 0x1732) = extraout_XMM0_Dc_x00679;
  *(undefined4 *)((long)puVar4 + 0xb994) = extraout_XMM0_Dd_x00679;
  puVar4[-0x346] = 0x8fa617;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1740];
  *puVar1 = extraout_XMM0_Da_x00680;
  puVar1[1] = extraout_XMM0_Db_x00680;
  puVar1[2] = extraout_XMM0_Dc_x00680;
  puVar1[3] = extraout_XMM0_Dd_x00680;
  puVar4[-0x346] = 0x8fa637;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1738];
  *puVar1 = extraout_XMM0_Da_x00681;
  puVar1[1] = extraout_XMM0_Db_x00681;
  puVar1[2] = extraout_XMM0_Dc_x00681;
  puVar1[3] = extraout_XMM0_Dd_x00681;
  puVar4[0x377] = puVar4[0x1df7];
  puVar4[0x378] = puVar4[0x1df8];
  puVar4[0x379] = puVar4[0x1df5];
  puVar4[0x37a] = puVar4[0x1df6];
  puVar4[0x37b] = puVar4[0x1df3];
  puVar4[0x37c] = puVar4[0x1df4];
  puVar4[0x37d] = puVar4[0x1def];
  puVar4[0x37e] = puVar4[0x1df0];
  puVar4[0x37f] = puVar4[0x1dfd];
  puVar4[0x380] = puVar4[0x1dfe];
  puVar4[0x381] = puVar4[0x1dfb];
  puVar4[0x382] = puVar4[0x1dfc];
  puVar4[-0x346] = 0x8fa6ae;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x172f] = puVar4[0x377];
  puVar4[0x1730] = puVar4[0x378];
  puVar4[0x172d] = puVar4[0x379];
  puVar4[0x172e] = puVar4[0x37a];
  puVar4[0x172b] = puVar4[0x37b];
  puVar4[0x172c] = puVar4[0x37c];
  puVar4[0x172a] = puVar4[0xccc];
  puVar4[0x1727] = puVar4[0x37d];
  puVar4[0x1728] = puVar4[0x37e];
  puVar4[0x1725] = puVar4[0x37f];
  puVar4[0x1726] = puVar4[0x380];
  puVar4[0x1723] = puVar4[0x381];
  puVar4[0x1724] = puVar4[0x382];
  puVar4[0x1722] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x171f) = extraout_XMM0_Da_x00682;
  *(undefined4 *)((long)puVar4 + 0xb8fc) = extraout_XMM0_Db_x00682;
  *(undefined4 *)(puVar4 + 0x1720) = extraout_XMM0_Dc_x00682;
  *(undefined4 *)((long)puVar4 + 0xb904) = extraout_XMM0_Dd_x00682;
  uVar2 = ((undefined8 *)puVar4[0x1722])[1];
  puVar4[0x385] = *(undefined8 *)puVar4[0x1722];
  puVar4[0x386] = uVar2;
  puVar4[-0x346] = 0x8fa756;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 899) = extraout_XMM0_Da_x00683;
  *(undefined4 *)((long)puVar4 + 0x1c1c) = extraout_XMM0_Db_x00683;
  *(undefined4 *)(puVar4 + 900) = extraout_XMM0_Dc_x00683;
  *(undefined4 *)((long)puVar4 + 0x1c24) = extraout_XMM0_Dd_x00683;
  puVar4[-0x346] = 0x8fa77b;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fa79b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x171d) = extraout_XMM0_Da_x00684;
  *(undefined4 *)((long)puVar4 + 0xb8ec) = extraout_XMM0_Db_x00684;
  *(undefined4 *)(puVar4 + 0x171e) = extraout_XMM0_Dc_x00684;
  *(undefined4 *)((long)puVar4 + 0xb8f4) = extraout_XMM0_Dd_x00684;
  puVar4[-0x346] = 0x8fa7b0;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x387) = extraout_XMM0_Da_x00685;
  *(undefined4 *)((long)puVar4 + 0x1c3c) = extraout_XMM0_Db_x00685;
  *(undefined4 *)(puVar4 + 0x388) = extraout_XMM0_Dc_x00685;
  *(undefined4 *)((long)puVar4 + 0x1c44) = extraout_XMM0_Dd_x00685;
  puVar4[-0x346] = 0x8fa7d5;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fa7e5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x171b) = extraout_XMM0_Da_x00686;
  *(undefined4 *)((long)puVar4 + 0xb8dc) = extraout_XMM0_Db_x00686;
  *(undefined4 *)(puVar4 + 0x171c) = extraout_XMM0_Dc_x00686;
  *(undefined4 *)((long)puVar4 + 0xb8e4) = extraout_XMM0_Dd_x00686;
  puVar4[-0x346] = 0x8fa805;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x172a];
  *puVar1 = extraout_XMM0_Da_x00687;
  puVar1[1] = extraout_XMM0_Db_x00687;
  puVar1[2] = extraout_XMM0_Dc_x00687;
  puVar1[3] = extraout_XMM0_Dd_x00687;
  puVar4[-0x346] = 0x8fa825;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1722];
  *puVar1 = extraout_XMM0_Da_x00688;
  puVar1[1] = extraout_XMM0_Db_x00688;
  puVar1[2] = extraout_XMM0_Dc_x00688;
  puVar1[3] = extraout_XMM0_Dd_x00688;
  puVar4[0x389] = puVar4[0x1df9];
  puVar4[0x38a] = puVar4[0x1dfa];
  puVar4[0x38b] = puVar4[0x1df7];
  puVar4[0x38c] = puVar4[0x1df8];
  puVar4[0x38d] = puVar4[0x1df5];
  puVar4[0x38e] = puVar4[0x1df6];
  puVar4[0x38f] = puVar4[0x1df1];
  puVar4[0x390] = puVar4[0x1df2];
  puVar4[0x391] = puVar4[0x1def];
  puVar4[0x392] = puVar4[0x1df0];
  puVar4[0x393] = puVar4[0x1dfd];
  puVar4[0x394] = puVar4[0x1dfe];
  puVar4[-0x346] = 0x8fa89c;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1719] = puVar4[0x389];
  puVar4[0x171a] = puVar4[0x38a];
  puVar4[0x1717] = puVar4[0x38b];
  puVar4[0x1718] = puVar4[0x38c];
  puVar4[0x1715] = puVar4[0x38d];
  puVar4[0x1716] = puVar4[0x38e];
  puVar4[0x1714] = puVar4[0xcec];
  puVar4[0x1711] = puVar4[0x38f];
  puVar4[0x1712] = puVar4[0x390];
  puVar4[0x170f] = puVar4[0x391];
  puVar4[0x1710] = puVar4[0x392];
  puVar4[0x170d] = puVar4[0x393];
  puVar4[0x170e] = puVar4[0x394];
  puVar4[0x170c] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x1709) = extraout_XMM0_Da_x00689;
  *(undefined4 *)((long)puVar4 + 0xb84c) = extraout_XMM0_Db_x00689;
  *(undefined4 *)(puVar4 + 0x170a) = extraout_XMM0_Dc_x00689;
  *(undefined4 *)((long)puVar4 + 0xb854) = extraout_XMM0_Dd_x00689;
  uVar2 = ((undefined8 *)puVar4[0x170c])[1];
  puVar4[0x397] = *(undefined8 *)puVar4[0x170c];
  puVar4[0x398] = uVar2;
  puVar4[-0x346] = 0x8fa944;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x395) = extraout_XMM0_Da_x00690;
  *(undefined4 *)((long)puVar4 + 0x1cac) = extraout_XMM0_Db_x00690;
  *(undefined4 *)(puVar4 + 0x396) = extraout_XMM0_Dc_x00690;
  *(undefined4 *)((long)puVar4 + 0x1cb4) = extraout_XMM0_Dd_x00690;
  puVar4[-0x346] = 0x8fa969;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fa989;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1707) = extraout_XMM0_Da_x00691;
  *(undefined4 *)((long)puVar4 + 0xb83c) = extraout_XMM0_Db_x00691;
  *(undefined4 *)(puVar4 + 0x1708) = extraout_XMM0_Dc_x00691;
  *(undefined4 *)((long)puVar4 + 0xb844) = extraout_XMM0_Dd_x00691;
  puVar4[-0x346] = 0x8fa99e;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x399) = extraout_XMM0_Da_x00692;
  *(undefined4 *)((long)puVar4 + 0x1ccc) = extraout_XMM0_Db_x00692;
  *(undefined4 *)(puVar4 + 0x39a) = extraout_XMM0_Dc_x00692;
  *(undefined4 *)((long)puVar4 + 0x1cd4) = extraout_XMM0_Dd_x00692;
  puVar4[-0x346] = 0x8fa9c3;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fa9d3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1705) = extraout_XMM0_Da_x00693;
  *(undefined4 *)((long)puVar4 + 0xb82c) = extraout_XMM0_Db_x00693;
  *(undefined4 *)(puVar4 + 0x1706) = extraout_XMM0_Dc_x00693;
  *(undefined4 *)((long)puVar4 + 0xb834) = extraout_XMM0_Dd_x00693;
  puVar4[-0x346] = 0x8fa9f3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1714];
  *puVar1 = extraout_XMM0_Da_x00694;
  puVar1[1] = extraout_XMM0_Db_x00694;
  puVar1[2] = extraout_XMM0_Dc_x00694;
  puVar1[3] = extraout_XMM0_Dd_x00694;
  puVar4[-0x346] = 0x8faa13;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x170c];
  *puVar1 = extraout_XMM0_Da_x00695;
  puVar1[1] = extraout_XMM0_Db_x00695;
  puVar1[2] = extraout_XMM0_Dc_x00695;
  puVar1[3] = extraout_XMM0_Dd_x00695;
  puVar4[0x39b] = puVar4[0x1dfb];
  puVar4[0x39c] = puVar4[0x1dfc];
  puVar4[0x39d] = puVar4[0x1df9];
  puVar4[0x39e] = puVar4[0x1dfa];
  puVar4[0x39f] = puVar4[0x1df7];
  puVar4[0x3a0] = puVar4[0x1df8];
  puVar4[0x3a1] = puVar4[0x1df3];
  puVar4[0x3a2] = puVar4[0x1df4];
  puVar4[0x3a3] = puVar4[0x1df1];
  puVar4[0x3a4] = puVar4[0x1df2];
  puVar4[0x3a5] = puVar4[0x1def];
  puVar4[0x3a6] = puVar4[0x1df0];
  puVar4[-0x346] = 0x8faa88;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1703] = puVar4[0x39b];
  puVar4[0x1704] = puVar4[0x39c];
  puVar4[0x1701] = puVar4[0x39d];
  puVar4[0x1702] = puVar4[0x39e];
  puVar4[0x16ff] = puVar4[0x39f];
  puVar4[0x1700] = puVar4[0x3a0];
  puVar4[0x16fe] = puVar4[0xd0c];
  puVar4[0x16fb] = puVar4[0x3a1];
  puVar4[0x16fc] = puVar4[0x3a2];
  puVar4[0x16f9] = puVar4[0x3a3];
  puVar4[0x16fa] = puVar4[0x3a4];
  puVar4[0x16f7] = puVar4[0x3a5];
  puVar4[0x16f8] = puVar4[0x3a6];
  puVar4[0x16f6] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x16f3) = extraout_XMM0_Da_x00696;
  *(undefined4 *)((long)puVar4 + 0xb79c) = extraout_XMM0_Db_x00696;
  *(undefined4 *)(puVar4 + 0x16f4) = extraout_XMM0_Dc_x00696;
  *(undefined4 *)((long)puVar4 + 0xb7a4) = extraout_XMM0_Dd_x00696;
  uVar2 = ((undefined8 *)puVar4[0x16f6])[1];
  puVar4[0x3a9] = *(undefined8 *)puVar4[0x16f6];
  puVar4[0x3aa] = uVar2;
  puVar4[-0x346] = 0x8fab30;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x3a7) = extraout_XMM0_Da_x00697;
  *(undefined4 *)((long)puVar4 + 0x1d3c) = extraout_XMM0_Db_x00697;
  *(undefined4 *)(puVar4 + 0x3a8) = extraout_XMM0_Dc_x00697;
  *(undefined4 *)((long)puVar4 + 0x1d44) = extraout_XMM0_Dd_x00697;
  puVar4[-0x346] = 0x8fab55;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fab75;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x16f1) = extraout_XMM0_Da_x00698;
  *(undefined4 *)((long)puVar4 + 0xb78c) = extraout_XMM0_Db_x00698;
  *(undefined4 *)(puVar4 + 0x16f2) = extraout_XMM0_Dc_x00698;
  *(undefined4 *)((long)puVar4 + 0xb794) = extraout_XMM0_Dd_x00698;
  puVar4[-0x346] = 0x8fab8a;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x3ab) = extraout_XMM0_Da_x00699;
  *(undefined4 *)((long)puVar4 + 0x1d5c) = extraout_XMM0_Db_x00699;
  *(undefined4 *)(puVar4 + 0x3ac) = extraout_XMM0_Dc_x00699;
  *(undefined4 *)((long)puVar4 + 0x1d64) = extraout_XMM0_Dd_x00699;
  puVar4[-0x346] = 0x8fabaf;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fabbf;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x16ef) = extraout_XMM0_Da_x00700;
  *(undefined4 *)((long)puVar4 + 0xb77c) = extraout_XMM0_Db_x00700;
  *(undefined4 *)(puVar4 + 0x16f0) = extraout_XMM0_Dc_x00700;
  *(undefined4 *)((long)puVar4 + 0xb784) = extraout_XMM0_Dd_x00700;
  puVar4[-0x346] = 0x8fabdf;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x16fe];
  *puVar1 = extraout_XMM0_Da_x00701;
  puVar1[1] = extraout_XMM0_Db_x00701;
  puVar1[2] = extraout_XMM0_Dc_x00701;
  puVar1[3] = extraout_XMM0_Dd_x00701;
  puVar4[-0x346] = 0x8fabff;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x16f6];
  *puVar1 = extraout_XMM0_Da_x00702;
  puVar1[1] = extraout_XMM0_Db_x00702;
  puVar1[2] = extraout_XMM0_Dc_x00702;
  puVar1[3] = extraout_XMM0_Dd_x00702;
  puVar4[0x3ad] = puVar4[0x1dfd];
  puVar4[0x3ae] = puVar4[0x1dfe];
  puVar4[0x3af] = puVar4[0x1dfb];
  puVar4[0x3b0] = puVar4[0x1dfc];
  puVar4[0x3b1] = puVar4[0x1df9];
  puVar4[0x3b2] = puVar4[0x1dfa];
  puVar4[0x3b3] = puVar4[0x1df5];
  puVar4[0x3b4] = puVar4[0x1df6];
  puVar4[0x3b5] = puVar4[0x1df3];
  puVar4[0x3b6] = puVar4[0x1df4];
  puVar4[0x3b7] = puVar4[0x1df1];
  puVar4[0x3b8] = puVar4[0x1df2];
  puVar4[-0x346] = 0x8fac74;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x16ed] = puVar4[0x3ad];
  puVar4[0x16ee] = puVar4[0x3ae];
  puVar4[0x16eb] = puVar4[0x3af];
  puVar4[0x16ec] = puVar4[0x3b0];
  puVar4[0x16e9] = puVar4[0x3b1];
  puVar4[0x16ea] = puVar4[0x3b2];
  puVar4[0x16e8] = puVar4[0xcb6];
  puVar4[0x16e5] = puVar4[0x3b3];
  puVar4[0x16e6] = puVar4[0x3b4];
  puVar4[0x16e3] = puVar4[0x3b5];
  puVar4[0x16e4] = puVar4[0x3b6];
  puVar4[0x16e1] = puVar4[0x3b7];
  puVar4[0x16e2] = puVar4[0x3b8];
  puVar4[0x16e0] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x16dd) = extraout_XMM0_Da_x00703;
  *(undefined4 *)((long)puVar4 + 0xb6ec) = extraout_XMM0_Db_x00703;
  *(undefined4 *)(puVar4 + 0x16de) = extraout_XMM0_Dc_x00703;
  *(undefined4 *)((long)puVar4 + 0xb6f4) = extraout_XMM0_Dd_x00703;
  uVar2 = ((undefined8 *)puVar4[0x16e0])[1];
  puVar4[0x3bb] = *(undefined8 *)puVar4[0x16e0];
  puVar4[0x3bc] = uVar2;
  puVar4[-0x346] = 0x8fad1c;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x3b9) = extraout_XMM0_Da_x00704;
  *(undefined4 *)((long)puVar4 + 0x1dcc) = extraout_XMM0_Db_x00704;
  *(undefined4 *)(puVar4 + 0x3ba) = extraout_XMM0_Dc_x00704;
  *(undefined4 *)((long)puVar4 + 0x1dd4) = extraout_XMM0_Dd_x00704;
  puVar4[-0x346] = 0x8fad41;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fad61;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x16db) = extraout_XMM0_Da_x00705;
  *(undefined4 *)((long)puVar4 + 0xb6dc) = extraout_XMM0_Db_x00705;
  *(undefined4 *)(puVar4 + 0x16dc) = extraout_XMM0_Dc_x00705;
  *(undefined4 *)((long)puVar4 + 0xb6e4) = extraout_XMM0_Dd_x00705;
  puVar4[-0x346] = 0x8fad76;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x3bd) = extraout_XMM0_Da_x00706;
  *(undefined4 *)((long)puVar4 + 0x1dec) = extraout_XMM0_Db_x00706;
  *(undefined4 *)(puVar4 + 0x3be) = extraout_XMM0_Dc_x00706;
  *(undefined4 *)((long)puVar4 + 0x1df4) = extraout_XMM0_Dd_x00706;
  puVar4[-0x346] = 0x8fad9b;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fadab;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x16d9) = extraout_XMM0_Da_x00707;
  *(undefined4 *)((long)puVar4 + 0xb6cc) = extraout_XMM0_Db_x00707;
  *(undefined4 *)(puVar4 + 0x16da) = extraout_XMM0_Dc_x00707;
  *(undefined4 *)((long)puVar4 + 0xb6d4) = extraout_XMM0_Dd_x00707;
  puVar4[-0x346] = 0x8fadcb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x16e8];
  *puVar1 = extraout_XMM0_Da_x00708;
  puVar1[1] = extraout_XMM0_Db_x00708;
  puVar1[2] = extraout_XMM0_Dc_x00708;
  puVar1[3] = extraout_XMM0_Dd_x00708;
  puVar4[-0x346] = 0x8fadeb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x16e0];
  *puVar1 = extraout_XMM0_Da_x00709;
  puVar1[1] = extraout_XMM0_Db_x00709;
  puVar1[2] = extraout_XMM0_Dc_x00709;
  puVar1[3] = extraout_XMM0_Dd_x00709;
  puVar4[0x3bf] = puVar4[0x1def];
  puVar4[0x3c0] = puVar4[0x1df0];
  puVar4[0x3c1] = puVar4[0x1dfd];
  puVar4[0x3c2] = puVar4[0x1dfe];
  puVar4[0x3c3] = puVar4[0x1dfb];
  puVar4[0x3c4] = puVar4[0x1dfc];
  puVar4[0x3c5] = puVar4[0x1df7];
  puVar4[0x3c6] = puVar4[0x1df8];
  puVar4[0x3c7] = puVar4[0x1df5];
  puVar4[0x3c8] = puVar4[0x1df6];
  puVar4[0x3c9] = puVar4[0x1df3];
  puVar4[0x3ca] = puVar4[0x1df4];
  puVar4[-0x346] = 0x8fae60;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x16d7] = puVar4[0x3bf];
  puVar4[0x16d8] = puVar4[0x3c0];
  puVar4[0x16d5] = puVar4[0x3c1];
  puVar4[0x16d6] = puVar4[0x3c2];
  puVar4[0x16d3] = puVar4[0x3c3];
  puVar4[0x16d4] = puVar4[0x3c4];
  puVar4[0x16d2] = puVar4[0xcd4];
  puVar4[0x16cf] = puVar4[0x3c5];
  puVar4[0x16d0] = puVar4[0x3c6];
  puVar4[0x16cd] = puVar4[0x3c7];
  puVar4[0x16ce] = puVar4[0x3c8];
  puVar4[0x16cb] = puVar4[0x3c9];
  puVar4[0x16cc] = puVar4[0x3ca];
  puVar4[0x16ca] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x16c7) = extraout_XMM0_Da_x00710;
  *(undefined4 *)((long)puVar4 + 0xb63c) = extraout_XMM0_Db_x00710;
  *(undefined4 *)(puVar4 + 0x16c8) = extraout_XMM0_Dc_x00710;
  *(undefined4 *)((long)puVar4 + 0xb644) = extraout_XMM0_Dd_x00710;
  uVar2 = ((undefined8 *)puVar4[0x16ca])[1];
  puVar4[0x3cd] = *(undefined8 *)puVar4[0x16ca];
  puVar4[0x3ce] = uVar2;
  puVar4[-0x346] = 0x8faf08;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x3cb) = extraout_XMM0_Da_x00711;
  *(undefined4 *)((long)puVar4 + 0x1e5c) = extraout_XMM0_Db_x00711;
  *(undefined4 *)(puVar4 + 0x3cc) = extraout_XMM0_Dc_x00711;
  *(undefined4 *)((long)puVar4 + 0x1e64) = extraout_XMM0_Dd_x00711;
  puVar4[-0x346] = 0x8faf2d;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8faf4d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x16c5) = extraout_XMM0_Da_x00712;
  *(undefined4 *)((long)puVar4 + 0xb62c) = extraout_XMM0_Db_x00712;
  *(undefined4 *)(puVar4 + 0x16c6) = extraout_XMM0_Dc_x00712;
  *(undefined4 *)((long)puVar4 + 0xb634) = extraout_XMM0_Dd_x00712;
  puVar4[-0x346] = 0x8faf62;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x3cf) = extraout_XMM0_Da_x00713;
  *(undefined4 *)((long)puVar4 + 0x1e7c) = extraout_XMM0_Db_x00713;
  *(undefined4 *)(puVar4 + 0x3d0) = extraout_XMM0_Dc_x00713;
  *(undefined4 *)((long)puVar4 + 0x1e84) = extraout_XMM0_Dd_x00713;
  puVar4[-0x346] = 0x8faf87;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8faf97;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x16c3) = extraout_XMM0_Da_x00714;
  *(undefined4 *)((long)puVar4 + 0xb61c) = extraout_XMM0_Db_x00714;
  *(undefined4 *)(puVar4 + 0x16c4) = extraout_XMM0_Dc_x00714;
  *(undefined4 *)((long)puVar4 + 0xb624) = extraout_XMM0_Dd_x00714;
  puVar4[-0x346] = 0x8fafb7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x16d2];
  *puVar1 = extraout_XMM0_Da_x00715;
  puVar1[1] = extraout_XMM0_Db_x00715;
  puVar1[2] = extraout_XMM0_Dc_x00715;
  puVar1[3] = extraout_XMM0_Dd_x00715;
  puVar4[-0x346] = 0x8fafd7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x16ca];
  *puVar1 = extraout_XMM0_Da_x00716;
  puVar1[1] = extraout_XMM0_Db_x00716;
  puVar1[2] = extraout_XMM0_Dc_x00716;
  puVar1[3] = extraout_XMM0_Dd_x00716;
  puVar4[0x3d1] = puVar4[0x1df1];
  puVar4[0x3d2] = puVar4[0x1df2];
  puVar4[0x3d3] = puVar4[0x1def];
  puVar4[0x3d4] = puVar4[0x1df0];
  puVar4[0x3d5] = puVar4[0x1dfd];
  puVar4[0x3d6] = puVar4[0x1dfe];
  puVar4[0x3d7] = puVar4[0x1df9];
  puVar4[0x3d8] = puVar4[0x1dfa];
  puVar4[0x3d9] = puVar4[0x1df7];
  puVar4[0x3da] = puVar4[0x1df8];
  puVar4[0x3db] = puVar4[0x1df5];
  puVar4[0x3dc] = puVar4[0x1df6];
  puVar4[-0x346] = 0x8fb04c;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x16c1] = puVar4[0x3d1];
  puVar4[0x16c2] = puVar4[0x3d2];
  puVar4[0x16bf] = puVar4[0x3d3];
  puVar4[0x16c0] = puVar4[0x3d4];
  puVar4[0x16bd] = puVar4[0x3d5];
  puVar4[0x16be] = puVar4[0x3d6];
  puVar4[0x16bc] = puVar4[0xcf4];
  puVar4[0x16b9] = puVar4[0x3d7];
  puVar4[0x16ba] = puVar4[0x3d8];
  puVar4[0x16b7] = puVar4[0x3d9];
  puVar4[0x16b8] = puVar4[0x3da];
  puVar4[0x16b5] = puVar4[0x3db];
  puVar4[0x16b6] = puVar4[0x3dc];
  puVar4[0x16b4] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x16b1) = extraout_XMM0_Da_x00717;
  *(undefined4 *)((long)puVar4 + 0xb58c) = extraout_XMM0_Db_x00717;
  *(undefined4 *)(puVar4 + 0x16b2) = extraout_XMM0_Dc_x00717;
  *(undefined4 *)((long)puVar4 + 0xb594) = extraout_XMM0_Dd_x00717;
  uVar2 = ((undefined8 *)puVar4[0x16b4])[1];
  puVar4[0x3df] = *(undefined8 *)puVar4[0x16b4];
  puVar4[0x3e0] = uVar2;
  puVar4[-0x346] = 0x8fb0f4;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x3dd) = extraout_XMM0_Da_x00718;
  *(undefined4 *)((long)puVar4 + 0x1eec) = extraout_XMM0_Db_x00718;
  *(undefined4 *)(puVar4 + 0x3de) = extraout_XMM0_Dc_x00718;
  *(undefined4 *)((long)puVar4 + 0x1ef4) = extraout_XMM0_Dd_x00718;
  puVar4[-0x346] = 0x8fb119;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fb139;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x16af) = extraout_XMM0_Da_x00719;
  *(undefined4 *)((long)puVar4 + 0xb57c) = extraout_XMM0_Db_x00719;
  *(undefined4 *)(puVar4 + 0x16b0) = extraout_XMM0_Dc_x00719;
  *(undefined4 *)((long)puVar4 + 0xb584) = extraout_XMM0_Dd_x00719;
  puVar4[-0x346] = 0x8fb14e;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x3e1) = extraout_XMM0_Da_x00720;
  *(undefined4 *)((long)puVar4 + 0x1f0c) = extraout_XMM0_Db_x00720;
  *(undefined4 *)(puVar4 + 0x3e2) = extraout_XMM0_Dc_x00720;
  *(undefined4 *)((long)puVar4 + 0x1f14) = extraout_XMM0_Dd_x00720;
  puVar4[-0x346] = 0x8fb173;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fb183;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x16ad) = extraout_XMM0_Da_x00721;
  *(undefined4 *)((long)puVar4 + 0xb56c) = extraout_XMM0_Db_x00721;
  *(undefined4 *)(puVar4 + 0x16ae) = extraout_XMM0_Dc_x00721;
  *(undefined4 *)((long)puVar4 + 0xb574) = extraout_XMM0_Dd_x00721;
  puVar4[-0x346] = 0x8fb1a3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x16bc];
  *puVar1 = extraout_XMM0_Da_x00722;
  puVar1[1] = extraout_XMM0_Db_x00722;
  puVar1[2] = extraout_XMM0_Dc_x00722;
  puVar1[3] = extraout_XMM0_Dd_x00722;
  puVar4[-0x346] = 0x8fb1c3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x16b4];
  *puVar1 = extraout_XMM0_Da_x00723;
  puVar1[1] = extraout_XMM0_Db_x00723;
  puVar1[2] = extraout_XMM0_Dc_x00723;
  puVar1[3] = extraout_XMM0_Dd_x00723;
  puVar4[0x3e3] = puVar4[0x1df3];
  puVar4[0x3e4] = puVar4[0x1df4];
  puVar4[0x3e5] = puVar4[0x1df1];
  puVar4[0x3e6] = puVar4[0x1df2];
  puVar4[999] = puVar4[0x1def];
  puVar4[1000] = puVar4[0x1df0];
  puVar4[0x3e9] = puVar4[0x1dfb];
  puVar4[0x3ea] = puVar4[0x1dfc];
  puVar4[0x3eb] = puVar4[0x1df9];
  puVar4[0x3ec] = puVar4[0x1dfa];
  puVar4[0x3ed] = puVar4[0x1df7];
  puVar4[0x3ee] = puVar4[0x1df8];
  puVar4[-0x346] = 0x8fb238;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x16ab] = puVar4[0x3e3];
  puVar4[0x16ac] = puVar4[0x3e4];
  puVar4[0x16a9] = puVar4[0x3e5];
  puVar4[0x16aa] = puVar4[0x3e6];
  puVar4[0x16a7] = puVar4[999];
  puVar4[0x16a8] = puVar4[1000];
  puVar4[0x16a6] = puVar4[0xd14];
  puVar4[0x16a3] = puVar4[0x3e9];
  puVar4[0x16a4] = puVar4[0x3ea];
  puVar4[0x16a1] = puVar4[0x3eb];
  puVar4[0x16a2] = puVar4[0x3ec];
  puVar4[0x169f] = puVar4[0x3ed];
  puVar4[0x16a0] = puVar4[0x3ee];
  puVar4[0x169e] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x169b) = extraout_XMM0_Da_x00724;
  *(undefined4 *)((long)puVar4 + 0xb4dc) = extraout_XMM0_Db_x00724;
  *(undefined4 *)(puVar4 + 0x169c) = extraout_XMM0_Dc_x00724;
  *(undefined4 *)((long)puVar4 + 0xb4e4) = extraout_XMM0_Dd_x00724;
  uVar2 = ((undefined8 *)puVar4[0x169e])[1];
  puVar4[0x3f1] = *(undefined8 *)puVar4[0x169e];
  puVar4[0x3f2] = uVar2;
  puVar4[-0x346] = 0x8fb2e0;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x3ef) = extraout_XMM0_Da_x00725;
  *(undefined4 *)((long)puVar4 + 0x1f7c) = extraout_XMM0_Db_x00725;
  *(undefined4 *)(puVar4 + 0x3f0) = extraout_XMM0_Dc_x00725;
  *(undefined4 *)((long)puVar4 + 0x1f84) = extraout_XMM0_Dd_x00725;
  puVar4[-0x346] = 0x8fb305;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fb325;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1699) = extraout_XMM0_Da_x00726;
  *(undefined4 *)((long)puVar4 + 0xb4cc) = extraout_XMM0_Db_x00726;
  *(undefined4 *)(puVar4 + 0x169a) = extraout_XMM0_Dc_x00726;
  *(undefined4 *)((long)puVar4 + 0xb4d4) = extraout_XMM0_Dd_x00726;
  puVar4[-0x346] = 0x8fb33a;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x3f3) = extraout_XMM0_Da_x00727;
  *(undefined4 *)((long)puVar4 + 0x1f9c) = extraout_XMM0_Db_x00727;
  *(undefined4 *)(puVar4 + 0x3f4) = extraout_XMM0_Dc_x00727;
  *(undefined4 *)((long)puVar4 + 0x1fa4) = extraout_XMM0_Dd_x00727;
  puVar4[-0x346] = 0x8fb35f;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fb36f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1697) = extraout_XMM0_Da_x00728;
  *(undefined4 *)((long)puVar4 + 0xb4bc) = extraout_XMM0_Db_x00728;
  *(undefined4 *)(puVar4 + 0x1698) = extraout_XMM0_Dc_x00728;
  *(undefined4 *)((long)puVar4 + 0xb4c4) = extraout_XMM0_Dd_x00728;
  puVar4[-0x346] = 0x8fb38f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x16a6];
  *puVar1 = extraout_XMM0_Da_x00729;
  puVar1[1] = extraout_XMM0_Db_x00729;
  puVar1[2] = extraout_XMM0_Dc_x00729;
  puVar1[3] = extraout_XMM0_Dd_x00729;
  puVar4[-0x346] = 0x8fb3af;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x169e];
  *puVar1 = extraout_XMM0_Da_x00730;
  puVar1[1] = extraout_XMM0_Db_x00730;
  puVar1[2] = extraout_XMM0_Dc_x00730;
  puVar1[3] = extraout_XMM0_Dd_x00730;
  puVar4[0x3f5] = puVar4[0x1df5];
  puVar4[0x3f6] = puVar4[0x1df6];
  puVar4[0x3f7] = puVar4[0x1df3];
  puVar4[0x3f8] = puVar4[0x1df4];
  puVar4[0x3f9] = puVar4[0x1df1];
  puVar4[0x3fa] = puVar4[0x1df2];
  puVar4[0x3fb] = puVar4[0x1dfd];
  puVar4[0x3fc] = puVar4[0x1dfe];
  puVar4[0x3fd] = puVar4[0x1dfb];
  puVar4[0x3fe] = puVar4[0x1dfc];
  puVar4[0x3ff] = puVar4[0x1df9];
  puVar4[0x400] = puVar4[0x1dfa];
  puVar4[-0x346] = 0x8fb424;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1695] = puVar4[0x3f5];
  puVar4[0x1696] = puVar4[0x3f6];
  puVar4[0x1693] = puVar4[0x3f7];
  puVar4[0x1694] = puVar4[0x3f8];
  puVar4[0x1691] = puVar4[0x3f9];
  puVar4[0x1692] = puVar4[0x3fa];
  puVar4[0x1690] = puVar4[0xcae];
  puVar4[0x168d] = puVar4[0x3fb];
  puVar4[0x168e] = puVar4[0x3fc];
  puVar4[0x168b] = puVar4[0x3fd];
  puVar4[0x168c] = puVar4[0x3fe];
  puVar4[0x1689] = puVar4[0x3ff];
  puVar4[0x168a] = puVar4[0x400];
  puVar4[0x1688] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x1685) = extraout_XMM0_Da_x00731;
  *(undefined4 *)((long)puVar4 + 0xb42c) = extraout_XMM0_Db_x00731;
  *(undefined4 *)(puVar4 + 0x1686) = extraout_XMM0_Dc_x00731;
  *(undefined4 *)((long)puVar4 + 0xb434) = extraout_XMM0_Dd_x00731;
  uVar2 = ((undefined8 *)puVar4[0x1688])[1];
  puVar4[0x403] = *(undefined8 *)puVar4[0x1688];
  puVar4[0x404] = uVar2;
  puVar4[-0x346] = 0x8fb4cc;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x401) = extraout_XMM0_Da_x00732;
  *(undefined4 *)((long)puVar4 + 0x200c) = extraout_XMM0_Db_x00732;
  *(undefined4 *)(puVar4 + 0x402) = extraout_XMM0_Dc_x00732;
  *(undefined4 *)((long)puVar4 + 0x2014) = extraout_XMM0_Dd_x00732;
  puVar4[-0x346] = 0x8fb4f1;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fb511;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1683) = extraout_XMM0_Da_x00733;
  *(undefined4 *)((long)puVar4 + 0xb41c) = extraout_XMM0_Db_x00733;
  *(undefined4 *)(puVar4 + 0x1684) = extraout_XMM0_Dc_x00733;
  *(undefined4 *)((long)puVar4 + 0xb424) = extraout_XMM0_Dd_x00733;
  puVar4[-0x346] = 0x8fb526;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x405) = extraout_XMM0_Da_x00734;
  *(undefined4 *)((long)puVar4 + 0x202c) = extraout_XMM0_Db_x00734;
  *(undefined4 *)(puVar4 + 0x406) = extraout_XMM0_Dc_x00734;
  *(undefined4 *)((long)puVar4 + 0x2034) = extraout_XMM0_Dd_x00734;
  puVar4[-0x346] = 0x8fb54b;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fb55b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1681) = extraout_XMM0_Da_x00735;
  *(undefined4 *)((long)puVar4 + 0xb40c) = extraout_XMM0_Db_x00735;
  *(undefined4 *)(puVar4 + 0x1682) = extraout_XMM0_Dc_x00735;
  *(undefined4 *)((long)puVar4 + 0xb414) = extraout_XMM0_Dd_x00735;
  puVar4[-0x346] = 0x8fb57b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1690];
  *puVar1 = extraout_XMM0_Da_x00736;
  puVar1[1] = extraout_XMM0_Db_x00736;
  puVar1[2] = extraout_XMM0_Dc_x00736;
  puVar1[3] = extraout_XMM0_Dd_x00736;
  puVar4[-0x346] = 0x8fb59b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1688];
  *puVar1 = extraout_XMM0_Da_x00737;
  puVar1[1] = extraout_XMM0_Db_x00737;
  puVar1[2] = extraout_XMM0_Dc_x00737;
  puVar1[3] = extraout_XMM0_Dd_x00737;
  puVar4[0x407] = puVar4[0x1df7];
  puVar4[0x408] = puVar4[0x1df8];
  puVar4[0x409] = puVar4[0x1df5];
  puVar4[0x40a] = puVar4[0x1df6];
  puVar4[0x40b] = puVar4[0x1df3];
  puVar4[0x40c] = puVar4[0x1df4];
  puVar4[0x40d] = puVar4[0x1def];
  puVar4[0x40e] = puVar4[0x1df0];
  puVar4[0x40f] = puVar4[0x1dfd];
  puVar4[0x410] = puVar4[0x1dfe];
  puVar4[0x411] = puVar4[0x1dfb];
  puVar4[0x412] = puVar4[0x1dfc];
  puVar4[-0x346] = 0x8fb610;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x167f] = puVar4[0x407];
  puVar4[0x1680] = puVar4[0x408];
  puVar4[0x167d] = puVar4[0x409];
  puVar4[0x167e] = puVar4[0x40a];
  puVar4[0x167b] = puVar4[0x40b];
  puVar4[0x167c] = puVar4[0x40c];
  puVar4[0x167a] = puVar4[0xccc];
  puVar4[0x1677] = puVar4[0x40d];
  puVar4[0x1678] = puVar4[0x40e];
  puVar4[0x1675] = puVar4[0x40f];
  puVar4[0x1676] = puVar4[0x410];
  puVar4[0x1673] = puVar4[0x411];
  puVar4[0x1674] = puVar4[0x412];
  puVar4[0x1672] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x166f) = extraout_XMM0_Da_x00738;
  *(undefined4 *)((long)puVar4 + 0xb37c) = extraout_XMM0_Db_x00738;
  *(undefined4 *)(puVar4 + 0x1670) = extraout_XMM0_Dc_x00738;
  *(undefined4 *)((long)puVar4 + 0xb384) = extraout_XMM0_Dd_x00738;
  uVar2 = ((undefined8 *)puVar4[0x1672])[1];
  puVar4[0x415] = *(undefined8 *)puVar4[0x1672];
  puVar4[0x416] = uVar2;
  puVar4[-0x346] = 0x8fb6b8;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x413) = extraout_XMM0_Da_x00739;
  *(undefined4 *)((long)puVar4 + 0x209c) = extraout_XMM0_Db_x00739;
  *(undefined4 *)(puVar4 + 0x414) = extraout_XMM0_Dc_x00739;
  *(undefined4 *)((long)puVar4 + 0x20a4) = extraout_XMM0_Dd_x00739;
  puVar4[-0x346] = 0x8fb6dd;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fb6fd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x166d) = extraout_XMM0_Da_x00740;
  *(undefined4 *)((long)puVar4 + 0xb36c) = extraout_XMM0_Db_x00740;
  *(undefined4 *)(puVar4 + 0x166e) = extraout_XMM0_Dc_x00740;
  *(undefined4 *)((long)puVar4 + 0xb374) = extraout_XMM0_Dd_x00740;
  puVar4[-0x346] = 0x8fb712;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x417) = extraout_XMM0_Da_x00741;
  *(undefined4 *)((long)puVar4 + 0x20bc) = extraout_XMM0_Db_x00741;
  *(undefined4 *)(puVar4 + 0x418) = extraout_XMM0_Dc_x00741;
  *(undefined4 *)((long)puVar4 + 0x20c4) = extraout_XMM0_Dd_x00741;
  puVar4[-0x346] = 0x8fb737;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fb747;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x166b) = extraout_XMM0_Da_x00742;
  *(undefined4 *)((long)puVar4 + 0xb35c) = extraout_XMM0_Db_x00742;
  *(undefined4 *)(puVar4 + 0x166c) = extraout_XMM0_Dc_x00742;
  *(undefined4 *)((long)puVar4 + 0xb364) = extraout_XMM0_Dd_x00742;
  puVar4[-0x346] = 0x8fb767;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x167a];
  *puVar1 = extraout_XMM0_Da_x00743;
  puVar1[1] = extraout_XMM0_Db_x00743;
  puVar1[2] = extraout_XMM0_Dc_x00743;
  puVar1[3] = extraout_XMM0_Dd_x00743;
  puVar4[-0x346] = 0x8fb787;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1672];
  *puVar1 = extraout_XMM0_Da_x00744;
  puVar1[1] = extraout_XMM0_Db_x00744;
  puVar1[2] = extraout_XMM0_Dc_x00744;
  puVar1[3] = extraout_XMM0_Dd_x00744;
  puVar4[0x419] = puVar4[0x1df9];
  puVar4[0x41a] = puVar4[0x1dfa];
  puVar4[0x41b] = puVar4[0x1df7];
  puVar4[0x41c] = puVar4[0x1df8];
  puVar4[0x41d] = puVar4[0x1df5];
  puVar4[0x41e] = puVar4[0x1df6];
  puVar4[0x41f] = puVar4[0x1df1];
  puVar4[0x420] = puVar4[0x1df2];
  puVar4[0x421] = puVar4[0x1def];
  puVar4[0x422] = puVar4[0x1df0];
  puVar4[0x423] = puVar4[0x1dfd];
  puVar4[0x424] = puVar4[0x1dfe];
  puVar4[-0x346] = 0x8fb7fc;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1669] = puVar4[0x419];
  puVar4[0x166a] = puVar4[0x41a];
  puVar4[0x1667] = puVar4[0x41b];
  puVar4[0x1668] = puVar4[0x41c];
  puVar4[0x1665] = puVar4[0x41d];
  puVar4[0x1666] = puVar4[0x41e];
  puVar4[0x1664] = puVar4[0xcec];
  puVar4[0x1661] = puVar4[0x41f];
  puVar4[0x1662] = puVar4[0x420];
  puVar4[0x165f] = puVar4[0x421];
  puVar4[0x1660] = puVar4[0x422];
  puVar4[0x165d] = puVar4[0x423];
  puVar4[0x165e] = puVar4[0x424];
  puVar4[0x165c] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x1659) = extraout_XMM0_Da_x00745;
  *(undefined4 *)((long)puVar4 + 0xb2cc) = extraout_XMM0_Db_x00745;
  *(undefined4 *)(puVar4 + 0x165a) = extraout_XMM0_Dc_x00745;
  *(undefined4 *)((long)puVar4 + 0xb2d4) = extraout_XMM0_Dd_x00745;
  uVar2 = ((undefined8 *)puVar4[0x165c])[1];
  puVar4[0x427] = *(undefined8 *)puVar4[0x165c];
  puVar4[0x428] = uVar2;
  puVar4[-0x346] = 0x8fb8a4;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x425) = extraout_XMM0_Da_x00746;
  *(undefined4 *)((long)puVar4 + 0x212c) = extraout_XMM0_Db_x00746;
  *(undefined4 *)(puVar4 + 0x426) = extraout_XMM0_Dc_x00746;
  *(undefined4 *)((long)puVar4 + 0x2134) = extraout_XMM0_Dd_x00746;
  puVar4[-0x346] = 0x8fb8c9;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fb8e9;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1657) = extraout_XMM0_Da_x00747;
  *(undefined4 *)((long)puVar4 + 0xb2bc) = extraout_XMM0_Db_x00747;
  *(undefined4 *)(puVar4 + 0x1658) = extraout_XMM0_Dc_x00747;
  *(undefined4 *)((long)puVar4 + 0xb2c4) = extraout_XMM0_Dd_x00747;
  puVar4[-0x346] = 0x8fb8fe;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x429) = extraout_XMM0_Da_x00748;
  *(undefined4 *)((long)puVar4 + 0x214c) = extraout_XMM0_Db_x00748;
  *(undefined4 *)(puVar4 + 0x42a) = extraout_XMM0_Dc_x00748;
  *(undefined4 *)((long)puVar4 + 0x2154) = extraout_XMM0_Dd_x00748;
  puVar4[-0x346] = 0x8fb923;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fb933;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1655) = extraout_XMM0_Da_x00749;
  *(undefined4 *)((long)puVar4 + 0xb2ac) = extraout_XMM0_Db_x00749;
  *(undefined4 *)(puVar4 + 0x1656) = extraout_XMM0_Dc_x00749;
  *(undefined4 *)((long)puVar4 + 0xb2b4) = extraout_XMM0_Dd_x00749;
  puVar4[-0x346] = 0x8fb953;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1664];
  *puVar1 = extraout_XMM0_Da_x00750;
  puVar1[1] = extraout_XMM0_Db_x00750;
  puVar1[2] = extraout_XMM0_Dc_x00750;
  puVar1[3] = extraout_XMM0_Dd_x00750;
  puVar4[-0x346] = 0x8fb973;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x165c];
  *puVar1 = extraout_XMM0_Da_x00751;
  puVar1[1] = extraout_XMM0_Db_x00751;
  puVar1[2] = extraout_XMM0_Dc_x00751;
  puVar1[3] = extraout_XMM0_Dd_x00751;
  puVar4[0x42b] = puVar4[0x1dfb];
  puVar4[0x42c] = puVar4[0x1dfc];
  puVar4[0x42d] = puVar4[0x1df9];
  puVar4[0x42e] = puVar4[0x1dfa];
  puVar4[0x42f] = puVar4[0x1df7];
  puVar4[0x430] = puVar4[0x1df8];
  puVar4[0x431] = puVar4[0x1df3];
  puVar4[0x432] = puVar4[0x1df4];
  puVar4[0x433] = puVar4[0x1df1];
  puVar4[0x434] = puVar4[0x1df2];
  puVar4[0x435] = puVar4[0x1def];
  puVar4[0x436] = puVar4[0x1df0];
  puVar4[-0x346] = 0x8fb9e8;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1653] = puVar4[0x42b];
  puVar4[0x1654] = puVar4[0x42c];
  puVar4[0x1651] = puVar4[0x42d];
  puVar4[0x1652] = puVar4[0x42e];
  puVar4[0x164f] = puVar4[0x42f];
  puVar4[0x1650] = puVar4[0x430];
  puVar4[0x164e] = puVar4[0xd0c];
  puVar4[0x164b] = puVar4[0x431];
  puVar4[0x164c] = puVar4[0x432];
  puVar4[0x1649] = puVar4[0x433];
  puVar4[0x164a] = puVar4[0x434];
  puVar4[0x1647] = puVar4[0x435];
  puVar4[0x1648] = puVar4[0x436];
  puVar4[0x1646] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x1643) = extraout_XMM0_Da_x00752;
  *(undefined4 *)((long)puVar4 + 0xb21c) = extraout_XMM0_Db_x00752;
  *(undefined4 *)(puVar4 + 0x1644) = extraout_XMM0_Dc_x00752;
  *(undefined4 *)((long)puVar4 + 0xb224) = extraout_XMM0_Dd_x00752;
  uVar2 = ((undefined8 *)puVar4[0x1646])[1];
  puVar4[0x439] = *(undefined8 *)puVar4[0x1646];
  puVar4[0x43a] = uVar2;
  puVar4[-0x346] = 0x8fba90;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x437) = extraout_XMM0_Da_x00753;
  *(undefined4 *)((long)puVar4 + 0x21bc) = extraout_XMM0_Db_x00753;
  *(undefined4 *)(puVar4 + 0x438) = extraout_XMM0_Dc_x00753;
  *(undefined4 *)((long)puVar4 + 0x21c4) = extraout_XMM0_Dd_x00753;
  puVar4[-0x346] = 0x8fbab5;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fbad5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1641) = extraout_XMM0_Da_x00754;
  *(undefined4 *)((long)puVar4 + 0xb20c) = extraout_XMM0_Db_x00754;
  *(undefined4 *)(puVar4 + 0x1642) = extraout_XMM0_Dc_x00754;
  *(undefined4 *)((long)puVar4 + 0xb214) = extraout_XMM0_Dd_x00754;
  puVar4[-0x346] = 0x8fbaea;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x43b) = extraout_XMM0_Da_x00755;
  *(undefined4 *)((long)puVar4 + 0x21dc) = extraout_XMM0_Db_x00755;
  *(undefined4 *)(puVar4 + 0x43c) = extraout_XMM0_Dc_x00755;
  *(undefined4 *)((long)puVar4 + 0x21e4) = extraout_XMM0_Dd_x00755;
  puVar4[-0x346] = 0x8fbb0f;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fbb1f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x163f) = extraout_XMM0_Da_x00756;
  *(undefined4 *)((long)puVar4 + 0xb1fc) = extraout_XMM0_Db_x00756;
  *(undefined4 *)(puVar4 + 0x1640) = extraout_XMM0_Dc_x00756;
  *(undefined4 *)((long)puVar4 + 0xb204) = extraout_XMM0_Dd_x00756;
  puVar4[-0x346] = 0x8fbb3f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x164e];
  *puVar1 = extraout_XMM0_Da_x00757;
  puVar1[1] = extraout_XMM0_Db_x00757;
  puVar1[2] = extraout_XMM0_Dc_x00757;
  puVar1[3] = extraout_XMM0_Dd_x00757;
  puVar4[-0x346] = 0x8fbb5f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1646];
  *puVar1 = extraout_XMM0_Da_x00758;
  puVar1[1] = extraout_XMM0_Db_x00758;
  puVar1[2] = extraout_XMM0_Dc_x00758;
  puVar1[3] = extraout_XMM0_Dd_x00758;
  puVar4[0x43d] = puVar4[0x1dfd];
  puVar4[0x43e] = puVar4[0x1dfe];
  puVar4[0x43f] = puVar4[0x1dfb];
  puVar4[0x440] = puVar4[0x1dfc];
  puVar4[0x441] = puVar4[0x1df9];
  puVar4[0x442] = puVar4[0x1dfa];
  puVar4[0x443] = puVar4[0x1df5];
  puVar4[0x444] = puVar4[0x1df6];
  puVar4[0x445] = puVar4[0x1df3];
  puVar4[0x446] = puVar4[0x1df4];
  puVar4[0x447] = puVar4[0x1df1];
  puVar4[0x448] = puVar4[0x1df2];
  puVar4[-0x346] = 0x8fbbd4;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x163d] = puVar4[0x43d];
  puVar4[0x163e] = puVar4[0x43e];
  puVar4[0x163b] = puVar4[0x43f];
  puVar4[0x163c] = puVar4[0x440];
  puVar4[0x1639] = puVar4[0x441];
  puVar4[0x163a] = puVar4[0x442];
  puVar4[0x1638] = puVar4[0xcb6];
  puVar4[0x1635] = puVar4[0x443];
  puVar4[0x1636] = puVar4[0x444];
  puVar4[0x1633] = puVar4[0x445];
  puVar4[0x1634] = puVar4[0x446];
  puVar4[0x1631] = puVar4[0x447];
  puVar4[0x1632] = puVar4[0x448];
  puVar4[0x1630] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x162d) = extraout_XMM0_Da_x00759;
  *(undefined4 *)((long)puVar4 + 0xb16c) = extraout_XMM0_Db_x00759;
  *(undefined4 *)(puVar4 + 0x162e) = extraout_XMM0_Dc_x00759;
  *(undefined4 *)((long)puVar4 + 0xb174) = extraout_XMM0_Dd_x00759;
  uVar2 = ((undefined8 *)puVar4[0x1630])[1];
  puVar4[1099] = *(undefined8 *)puVar4[0x1630];
  puVar4[0x44c] = uVar2;
  puVar4[-0x346] = 0x8fbc7c;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x449) = extraout_XMM0_Da_x00760;
  *(undefined4 *)((long)puVar4 + 0x224c) = extraout_XMM0_Db_x00760;
  *(undefined4 *)(puVar4 + 0x44a) = extraout_XMM0_Dc_x00760;
  *(undefined4 *)((long)puVar4 + 0x2254) = extraout_XMM0_Dd_x00760;
  puVar4[-0x346] = 0x8fbca1;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fbcc1;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x162b) = extraout_XMM0_Da_x00761;
  *(undefined4 *)((long)puVar4 + 0xb15c) = extraout_XMM0_Db_x00761;
  *(undefined4 *)(puVar4 + 0x162c) = extraout_XMM0_Dc_x00761;
  *(undefined4 *)((long)puVar4 + 0xb164) = extraout_XMM0_Dd_x00761;
  puVar4[-0x346] = 0x8fbcd6;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x44d) = extraout_XMM0_Da_x00762;
  *(undefined4 *)((long)puVar4 + 0x226c) = extraout_XMM0_Db_x00762;
  *(undefined4 *)(puVar4 + 0x44e) = extraout_XMM0_Dc_x00762;
  *(undefined4 *)((long)puVar4 + 0x2274) = extraout_XMM0_Dd_x00762;
  puVar4[-0x346] = 0x8fbcfb;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fbd0b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1629) = extraout_XMM0_Da_x00763;
  *(undefined4 *)((long)puVar4 + 0xb14c) = extraout_XMM0_Db_x00763;
  *(undefined4 *)(puVar4 + 0x162a) = extraout_XMM0_Dc_x00763;
  *(undefined4 *)((long)puVar4 + 0xb154) = extraout_XMM0_Dd_x00763;
  puVar4[-0x346] = 0x8fbd2b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1638];
  *puVar1 = extraout_XMM0_Da_x00764;
  puVar1[1] = extraout_XMM0_Db_x00764;
  puVar1[2] = extraout_XMM0_Dc_x00764;
  puVar1[3] = extraout_XMM0_Dd_x00764;
  puVar4[-0x346] = 0x8fbd4b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1630];
  *puVar1 = extraout_XMM0_Da_x00765;
  puVar1[1] = extraout_XMM0_Db_x00765;
  puVar1[2] = extraout_XMM0_Dc_x00765;
  puVar1[3] = extraout_XMM0_Dd_x00765;
  puVar4[0x44f] = puVar4[0x1def];
  puVar4[0x450] = puVar4[0x1df0];
  puVar4[0x451] = puVar4[0x1dfd];
  puVar4[0x452] = puVar4[0x1dfe];
  puVar4[0x453] = puVar4[0x1dfb];
  puVar4[0x454] = puVar4[0x1dfc];
  puVar4[0x455] = puVar4[0x1df7];
  puVar4[0x456] = puVar4[0x1df8];
  puVar4[0x457] = puVar4[0x1df5];
  puVar4[0x458] = puVar4[0x1df6];
  puVar4[0x459] = puVar4[0x1df3];
  puVar4[0x45a] = puVar4[0x1df4];
  puVar4[-0x346] = 0x8fbdc0;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1627] = puVar4[0x44f];
  puVar4[0x1628] = puVar4[0x450];
  puVar4[0x1625] = puVar4[0x451];
  puVar4[0x1626] = puVar4[0x452];
  puVar4[0x1623] = puVar4[0x453];
  puVar4[0x1624] = puVar4[0x454];
  puVar4[0x1622] = puVar4[0xcd4];
  puVar4[0x161f] = puVar4[0x455];
  puVar4[0x1620] = puVar4[0x456];
  puVar4[0x161d] = puVar4[0x457];
  puVar4[0x161e] = puVar4[0x458];
  puVar4[0x161b] = puVar4[0x459];
  puVar4[0x161c] = puVar4[0x45a];
  puVar4[0x161a] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x1617) = extraout_XMM0_Da_x00766;
  *(undefined4 *)((long)puVar4 + 0xb0bc) = extraout_XMM0_Db_x00766;
  *(undefined4 *)(puVar4 + 0x1618) = extraout_XMM0_Dc_x00766;
  *(undefined4 *)((long)puVar4 + 0xb0c4) = extraout_XMM0_Dd_x00766;
  uVar2 = ((undefined8 *)puVar4[0x161a])[1];
  puVar4[0x45d] = *(undefined8 *)puVar4[0x161a];
  puVar4[0x45e] = uVar2;
  puVar4[-0x346] = 0x8fbe68;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x45b) = extraout_XMM0_Da_x00767;
  *(undefined4 *)((long)puVar4 + 0x22dc) = extraout_XMM0_Db_x00767;
  *(undefined4 *)(puVar4 + 0x45c) = extraout_XMM0_Dc_x00767;
  *(undefined4 *)((long)puVar4 + 0x22e4) = extraout_XMM0_Dd_x00767;
  puVar4[-0x346] = 0x8fbe8d;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fbead;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1615) = extraout_XMM0_Da_x00768;
  *(undefined4 *)((long)puVar4 + 0xb0ac) = extraout_XMM0_Db_x00768;
  *(undefined4 *)(puVar4 + 0x1616) = extraout_XMM0_Dc_x00768;
  *(undefined4 *)((long)puVar4 + 0xb0b4) = extraout_XMM0_Dd_x00768;
  puVar4[-0x346] = 0x8fbec2;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x45f) = extraout_XMM0_Da_x00769;
  *(undefined4 *)((long)puVar4 + 0x22fc) = extraout_XMM0_Db_x00769;
  *(undefined4 *)(puVar4 + 0x460) = extraout_XMM0_Dc_x00769;
  *(undefined4 *)((long)puVar4 + 0x2304) = extraout_XMM0_Dd_x00769;
  puVar4[-0x346] = 0x8fbee7;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fbef7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1613) = extraout_XMM0_Da_x00770;
  *(undefined4 *)((long)puVar4 + 0xb09c) = extraout_XMM0_Db_x00770;
  *(undefined4 *)(puVar4 + 0x1614) = extraout_XMM0_Dc_x00770;
  *(undefined4 *)((long)puVar4 + 0xb0a4) = extraout_XMM0_Dd_x00770;
  puVar4[-0x346] = 0x8fbf17;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1622];
  *puVar1 = extraout_XMM0_Da_x00771;
  puVar1[1] = extraout_XMM0_Db_x00771;
  puVar1[2] = extraout_XMM0_Dc_x00771;
  puVar1[3] = extraout_XMM0_Dd_x00771;
  puVar4[-0x346] = 0x8fbf37;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x161a];
  *puVar1 = extraout_XMM0_Da_x00772;
  puVar1[1] = extraout_XMM0_Db_x00772;
  puVar1[2] = extraout_XMM0_Dc_x00772;
  puVar1[3] = extraout_XMM0_Dd_x00772;
  puVar4[0x461] = puVar4[0x1df1];
  puVar4[0x462] = puVar4[0x1df2];
  puVar4[0x463] = puVar4[0x1def];
  puVar4[0x464] = puVar4[0x1df0];
  puVar4[0x465] = puVar4[0x1dfd];
  puVar4[0x466] = puVar4[0x1dfe];
  puVar4[0x467] = puVar4[0x1df9];
  puVar4[0x468] = puVar4[0x1dfa];
  puVar4[0x469] = puVar4[0x1df7];
  puVar4[0x46a] = puVar4[0x1df8];
  puVar4[0x46b] = puVar4[0x1df5];
  puVar4[0x46c] = puVar4[0x1df6];
  puVar4[-0x346] = 0x8fbfac;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1611] = puVar4[0x461];
  puVar4[0x1612] = puVar4[0x462];
  puVar4[0x160f] = puVar4[0x463];
  puVar4[0x1610] = puVar4[0x464];
  puVar4[0x160d] = puVar4[0x465];
  puVar4[0x160e] = puVar4[0x466];
  puVar4[0x160c] = puVar4[0xcf4];
  puVar4[0x1609] = puVar4[0x467];
  puVar4[0x160a] = puVar4[0x468];
  puVar4[0x1607] = puVar4[0x469];
  puVar4[0x1608] = puVar4[0x46a];
  puVar4[0x1605] = puVar4[0x46b];
  puVar4[0x1606] = puVar4[0x46c];
  puVar4[0x1604] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x1601) = extraout_XMM0_Da_x00773;
  *(undefined4 *)((long)puVar4 + 0xb00c) = extraout_XMM0_Db_x00773;
  *(undefined4 *)(puVar4 + 0x1602) = extraout_XMM0_Dc_x00773;
  *(undefined4 *)((long)puVar4 + 0xb014) = extraout_XMM0_Dd_x00773;
  uVar2 = ((undefined8 *)puVar4[0x1604])[1];
  puVar4[0x46f] = *(undefined8 *)puVar4[0x1604];
  puVar4[0x470] = uVar2;
  puVar4[-0x346] = 0x8fc054;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x46d) = extraout_XMM0_Da_x00774;
  *(undefined4 *)((long)puVar4 + 0x236c) = extraout_XMM0_Db_x00774;
  *(undefined4 *)(puVar4 + 0x46e) = extraout_XMM0_Dc_x00774;
  *(undefined4 *)((long)puVar4 + 0x2374) = extraout_XMM0_Dd_x00774;
  puVar4[-0x346] = 0x8fc079;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fc099;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x15ff) = extraout_XMM0_Da_x00775;
  *(undefined4 *)((long)puVar4 + 0xaffc) = extraout_XMM0_Db_x00775;
  *(undefined4 *)(puVar4 + 0x1600) = extraout_XMM0_Dc_x00775;
  *(undefined4 *)((long)puVar4 + 0xb004) = extraout_XMM0_Dd_x00775;
  puVar4[-0x346] = 0x8fc0ae;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x471) = extraout_XMM0_Da_x00776;
  *(undefined4 *)((long)puVar4 + 0x238c) = extraout_XMM0_Db_x00776;
  *(undefined4 *)(puVar4 + 0x472) = extraout_XMM0_Dc_x00776;
  *(undefined4 *)((long)puVar4 + 0x2394) = extraout_XMM0_Dd_x00776;
  puVar4[-0x346] = 0x8fc0d3;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fc0e3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x15fd) = extraout_XMM0_Da_x00777;
  *(undefined4 *)((long)puVar4 + 0xafec) = extraout_XMM0_Db_x00777;
  *(undefined4 *)(puVar4 + 0x15fe) = extraout_XMM0_Dc_x00777;
  *(undefined4 *)((long)puVar4 + 0xaff4) = extraout_XMM0_Dd_x00777;
  puVar4[-0x346] = 0x8fc103;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x160c];
  *puVar1 = extraout_XMM0_Da_x00778;
  puVar1[1] = extraout_XMM0_Db_x00778;
  puVar1[2] = extraout_XMM0_Dc_x00778;
  puVar1[3] = extraout_XMM0_Dd_x00778;
  puVar4[-0x346] = 0x8fc123;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1604];
  *puVar1 = extraout_XMM0_Da_x00779;
  puVar1[1] = extraout_XMM0_Db_x00779;
  puVar1[2] = extraout_XMM0_Dc_x00779;
  puVar1[3] = extraout_XMM0_Dd_x00779;
  puVar4[0x473] = puVar4[0x1df3];
  puVar4[0x474] = puVar4[0x1df4];
  puVar4[0x475] = puVar4[0x1df1];
  puVar4[0x476] = puVar4[0x1df2];
  puVar4[0x477] = puVar4[0x1def];
  puVar4[0x478] = puVar4[0x1df0];
  puVar4[0x479] = puVar4[0x1dfb];
  puVar4[0x47a] = puVar4[0x1dfc];
  puVar4[0x47b] = puVar4[0x1df9];
  puVar4[0x47c] = puVar4[0x1dfa];
  puVar4[0x47d] = puVar4[0x1df7];
  puVar4[0x47e] = puVar4[0x1df8];
  puVar4[-0x346] = 0x8fc198;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x15fb] = puVar4[0x473];
  puVar4[0x15fc] = puVar4[0x474];
  puVar4[0x15f9] = puVar4[0x475];
  puVar4[0x15fa] = puVar4[0x476];
  puVar4[0x15f7] = puVar4[0x477];
  puVar4[0x15f8] = puVar4[0x478];
  puVar4[0x15f6] = puVar4[0xd14];
  puVar4[0x15f3] = puVar4[0x479];
  puVar4[0x15f4] = puVar4[0x47a];
  puVar4[0x15f1] = puVar4[0x47b];
  puVar4[0x15f2] = puVar4[0x47c];
  puVar4[0x15ef] = puVar4[0x47d];
  puVar4[0x15f0] = puVar4[0x47e];
  puVar4[0x15ee] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x15eb) = extraout_XMM0_Da_x00780;
  *(undefined4 *)((long)puVar4 + 0xaf5c) = extraout_XMM0_Db_x00780;
  *(undefined4 *)(puVar4 + 0x15ec) = extraout_XMM0_Dc_x00780;
  *(undefined4 *)((long)puVar4 + 0xaf64) = extraout_XMM0_Dd_x00780;
  uVar2 = ((undefined8 *)puVar4[0x15ee])[1];
  puVar4[0x481] = *(undefined8 *)puVar4[0x15ee];
  puVar4[0x482] = uVar2;
  puVar4[-0x346] = 0x8fc240;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x47f) = extraout_XMM0_Da_x00781;
  *(undefined4 *)((long)puVar4 + 0x23fc) = extraout_XMM0_Db_x00781;
  *(undefined4 *)(puVar4 + 0x480) = extraout_XMM0_Dc_x00781;
  *(undefined4 *)((long)puVar4 + 0x2404) = extraout_XMM0_Dd_x00781;
  puVar4[-0x346] = 0x8fc265;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fc285;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x15e9) = extraout_XMM0_Da_x00782;
  *(undefined4 *)((long)puVar4 + 0xaf4c) = extraout_XMM0_Db_x00782;
  *(undefined4 *)(puVar4 + 0x15ea) = extraout_XMM0_Dc_x00782;
  *(undefined4 *)((long)puVar4 + 0xaf54) = extraout_XMM0_Dd_x00782;
  puVar4[-0x346] = 0x8fc29a;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x483) = extraout_XMM0_Da_x00783;
  *(undefined4 *)((long)puVar4 + 0x241c) = extraout_XMM0_Db_x00783;
  *(undefined4 *)(puVar4 + 0x484) = extraout_XMM0_Dc_x00783;
  *(undefined4 *)((long)puVar4 + 0x2424) = extraout_XMM0_Dd_x00783;
  puVar4[-0x346] = 0x8fc2bf;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fc2cf;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x15e7) = extraout_XMM0_Da_x00784;
  *(undefined4 *)((long)puVar4 + 0xaf3c) = extraout_XMM0_Db_x00784;
  *(undefined4 *)(puVar4 + 0x15e8) = extraout_XMM0_Dc_x00784;
  *(undefined4 *)((long)puVar4 + 0xaf44) = extraout_XMM0_Dd_x00784;
  puVar4[-0x346] = 0x8fc2ef;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x15f6];
  *puVar1 = extraout_XMM0_Da_x00785;
  puVar1[1] = extraout_XMM0_Db_x00785;
  puVar1[2] = extraout_XMM0_Dc_x00785;
  puVar1[3] = extraout_XMM0_Dd_x00785;
  puVar4[-0x346] = 0x8fc30f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x15ee];
  *puVar1 = extraout_XMM0_Da_x00786;
  puVar1[1] = extraout_XMM0_Db_x00786;
  puVar1[2] = extraout_XMM0_Dc_x00786;
  puVar1[3] = extraout_XMM0_Dd_x00786;
  puVar4[0x485] = puVar4[0x1df5];
  puVar4[0x486] = puVar4[0x1df6];
  puVar4[0x487] = puVar4[0x1df3];
  puVar4[0x488] = puVar4[0x1df4];
  puVar4[0x489] = puVar4[0x1df1];
  puVar4[0x48a] = puVar4[0x1df2];
  puVar4[0x48b] = puVar4[0x1dfd];
  puVar4[0x48c] = puVar4[0x1dfe];
  puVar4[0x48d] = puVar4[0x1dfb];
  puVar4[0x48e] = puVar4[0x1dfc];
  puVar4[0x48f] = puVar4[0x1df9];
  puVar4[0x490] = puVar4[0x1dfa];
  puVar4[-0x346] = 0x8fc384;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x15e5] = puVar4[0x485];
  puVar4[0x15e6] = puVar4[0x486];
  puVar4[0x15e3] = puVar4[0x487];
  puVar4[0x15e4] = puVar4[0x488];
  puVar4[0x15e1] = puVar4[0x489];
  puVar4[0x15e2] = puVar4[0x48a];
  puVar4[0x15e0] = puVar4[0xcae];
  puVar4[0x15dd] = puVar4[0x48b];
  puVar4[0x15de] = puVar4[0x48c];
  puVar4[0x15db] = puVar4[0x48d];
  puVar4[0x15dc] = puVar4[0x48e];
  puVar4[0x15d9] = puVar4[0x48f];
  puVar4[0x15da] = puVar4[0x490];
  puVar4[0x15d8] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x15d5) = extraout_XMM0_Da_x00787;
  *(undefined4 *)((long)puVar4 + 0xaeac) = extraout_XMM0_Db_x00787;
  *(undefined4 *)(puVar4 + 0x15d6) = extraout_XMM0_Dc_x00787;
  *(undefined4 *)((long)puVar4 + 0xaeb4) = extraout_XMM0_Dd_x00787;
  uVar2 = ((undefined8 *)puVar4[0x15d8])[1];
  puVar4[0x493] = *(undefined8 *)puVar4[0x15d8];
  puVar4[0x494] = uVar2;
  puVar4[-0x346] = 0x8fc42c;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x491) = extraout_XMM0_Da_x00788;
  *(undefined4 *)((long)puVar4 + 0x248c) = extraout_XMM0_Db_x00788;
  *(undefined4 *)(puVar4 + 0x492) = extraout_XMM0_Dc_x00788;
  *(undefined4 *)((long)puVar4 + 0x2494) = extraout_XMM0_Dd_x00788;
  puVar4[-0x346] = 0x8fc451;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fc471;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x15d3) = extraout_XMM0_Da_x00789;
  *(undefined4 *)((long)puVar4 + 0xae9c) = extraout_XMM0_Db_x00789;
  *(undefined4 *)(puVar4 + 0x15d4) = extraout_XMM0_Dc_x00789;
  *(undefined4 *)((long)puVar4 + 0xaea4) = extraout_XMM0_Dd_x00789;
  puVar4[-0x346] = 0x8fc486;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x495) = extraout_XMM0_Da_x00790;
  *(undefined4 *)((long)puVar4 + 0x24ac) = extraout_XMM0_Db_x00790;
  *(undefined4 *)(puVar4 + 0x496) = extraout_XMM0_Dc_x00790;
  *(undefined4 *)((long)puVar4 + 0x24b4) = extraout_XMM0_Dd_x00790;
  puVar4[-0x346] = 0x8fc4ab;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fc4bb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x15d1) = extraout_XMM0_Da_x00791;
  *(undefined4 *)((long)puVar4 + 0xae8c) = extraout_XMM0_Db_x00791;
  *(undefined4 *)(puVar4 + 0x15d2) = extraout_XMM0_Dc_x00791;
  *(undefined4 *)((long)puVar4 + 0xae94) = extraout_XMM0_Dd_x00791;
  puVar4[-0x346] = 0x8fc4db;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x15e0];
  *puVar1 = extraout_XMM0_Da_x00792;
  puVar1[1] = extraout_XMM0_Db_x00792;
  puVar1[2] = extraout_XMM0_Dc_x00792;
  puVar1[3] = extraout_XMM0_Dd_x00792;
  puVar4[-0x346] = 0x8fc4fb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x15d8];
  *puVar1 = extraout_XMM0_Da_x00793;
  puVar1[1] = extraout_XMM0_Db_x00793;
  puVar1[2] = extraout_XMM0_Dc_x00793;
  puVar1[3] = extraout_XMM0_Dd_x00793;
  puVar4[0x497] = puVar4[0x1df7];
  puVar4[0x498] = puVar4[0x1df8];
  puVar4[0x499] = puVar4[0x1df5];
  puVar4[0x49a] = puVar4[0x1df6];
  puVar4[0x49b] = puVar4[0x1df3];
  puVar4[0x49c] = puVar4[0x1df4];
  puVar4[0x49d] = puVar4[0x1def];
  puVar4[0x49e] = puVar4[0x1df0];
  puVar4[0x49f] = puVar4[0x1dfd];
  puVar4[0x4a0] = puVar4[0x1dfe];
  puVar4[0x4a1] = puVar4[0x1dfb];
  puVar4[0x4a2] = puVar4[0x1dfc];
  puVar4[-0x346] = 0x8fc570;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x15cf] = puVar4[0x497];
  puVar4[0x15d0] = puVar4[0x498];
  puVar4[0x15cd] = puVar4[0x499];
  puVar4[0x15ce] = puVar4[0x49a];
  puVar4[0x15cb] = puVar4[0x49b];
  puVar4[0x15cc] = puVar4[0x49c];
  puVar4[0x15ca] = puVar4[0xccc];
  puVar4[0x15c7] = puVar4[0x49d];
  puVar4[0x15c8] = puVar4[0x49e];
  puVar4[0x15c5] = puVar4[0x49f];
  puVar4[0x15c6] = puVar4[0x4a0];
  puVar4[0x15c3] = puVar4[0x4a1];
  puVar4[0x15c4] = puVar4[0x4a2];
  puVar4[0x15c2] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x15bf) = extraout_XMM0_Da_x00794;
  *(undefined4 *)((long)puVar4 + 0xadfc) = extraout_XMM0_Db_x00794;
  *(undefined4 *)(puVar4 + 0x15c0) = extraout_XMM0_Dc_x00794;
  *(undefined4 *)((long)puVar4 + 0xae04) = extraout_XMM0_Dd_x00794;
  uVar2 = ((undefined8 *)puVar4[0x15c2])[1];
  puVar4[0x4a5] = *(undefined8 *)puVar4[0x15c2];
  puVar4[0x4a6] = uVar2;
  puVar4[-0x346] = 0x8fc618;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x4a3) = extraout_XMM0_Da_x00795;
  *(undefined4 *)((long)puVar4 + 0x251c) = extraout_XMM0_Db_x00795;
  *(undefined4 *)(puVar4 + 0x4a4) = extraout_XMM0_Dc_x00795;
  *(undefined4 *)((long)puVar4 + 0x2524) = extraout_XMM0_Dd_x00795;
  puVar4[-0x346] = 0x8fc63d;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fc65d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x15bd) = extraout_XMM0_Da_x00796;
  *(undefined4 *)((long)puVar4 + 0xadec) = extraout_XMM0_Db_x00796;
  *(undefined4 *)(puVar4 + 0x15be) = extraout_XMM0_Dc_x00796;
  *(undefined4 *)((long)puVar4 + 0xadf4) = extraout_XMM0_Dd_x00796;
  puVar4[-0x346] = 0x8fc672;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x4a7) = extraout_XMM0_Da_x00797;
  *(undefined4 *)((long)puVar4 + 0x253c) = extraout_XMM0_Db_x00797;
  *(undefined4 *)(puVar4 + 0x4a8) = extraout_XMM0_Dc_x00797;
  *(undefined4 *)((long)puVar4 + 0x2544) = extraout_XMM0_Dd_x00797;
  puVar4[-0x346] = 0x8fc697;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fc6a7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x15bb) = extraout_XMM0_Da_x00798;
  *(undefined4 *)((long)puVar4 + 0xaddc) = extraout_XMM0_Db_x00798;
  *(undefined4 *)(puVar4 + 0x15bc) = extraout_XMM0_Dc_x00798;
  *(undefined4 *)((long)puVar4 + 0xade4) = extraout_XMM0_Dd_x00798;
  puVar4[-0x346] = 0x8fc6c7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x15ca];
  *puVar1 = extraout_XMM0_Da_x00799;
  puVar1[1] = extraout_XMM0_Db_x00799;
  puVar1[2] = extraout_XMM0_Dc_x00799;
  puVar1[3] = extraout_XMM0_Dd_x00799;
  puVar4[-0x346] = 0x8fc6e7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x15c2];
  *puVar1 = extraout_XMM0_Da_x00800;
  puVar1[1] = extraout_XMM0_Db_x00800;
  puVar1[2] = extraout_XMM0_Dc_x00800;
  puVar1[3] = extraout_XMM0_Dd_x00800;
  puVar4[0x4a9] = puVar4[0x1df9];
  puVar4[0x4aa] = puVar4[0x1dfa];
  puVar4[0x4ab] = puVar4[0x1df7];
  puVar4[0x4ac] = puVar4[0x1df8];
  puVar4[0x4ad] = puVar4[0x1df5];
  puVar4[0x4ae] = puVar4[0x1df6];
  puVar4[0x4af] = puVar4[0x1df1];
  puVar4[0x4b0] = puVar4[0x1df2];
  puVar4[0x4b1] = puVar4[0x1def];
  puVar4[0x4b2] = puVar4[0x1df0];
  puVar4[0x4b3] = puVar4[0x1dfd];
  puVar4[0x4b4] = puVar4[0x1dfe];
  puVar4[-0x346] = 0x8fc75c;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x15b9] = puVar4[0x4a9];
  puVar4[0x15ba] = puVar4[0x4aa];
  puVar4[0x15b7] = puVar4[0x4ab];
  puVar4[0x15b8] = puVar4[0x4ac];
  puVar4[0x15b5] = puVar4[0x4ad];
  puVar4[0x15b6] = puVar4[0x4ae];
  puVar4[0x15b4] = puVar4[0xcec];
  puVar4[0x15b1] = puVar4[0x4af];
  puVar4[0x15b2] = puVar4[0x4b0];
  puVar4[0x15af] = puVar4[0x4b1];
  puVar4[0x15b0] = puVar4[0x4b2];
  puVar4[0x15ad] = puVar4[0x4b3];
  puVar4[0x15ae] = puVar4[0x4b4];
  puVar4[0x15ac] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x15a9) = extraout_XMM0_Da_x00801;
  *(undefined4 *)((long)puVar4 + 0xad4c) = extraout_XMM0_Db_x00801;
  *(undefined4 *)(puVar4 + 0x15aa) = extraout_XMM0_Dc_x00801;
  *(undefined4 *)((long)puVar4 + 0xad54) = extraout_XMM0_Dd_x00801;
  uVar2 = ((undefined8 *)puVar4[0x15ac])[1];
  puVar4[0x4b7] = *(undefined8 *)puVar4[0x15ac];
  puVar4[0x4b8] = uVar2;
  puVar4[-0x346] = 0x8fc804;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x4b5) = extraout_XMM0_Da_x00802;
  *(undefined4 *)((long)puVar4 + 0x25ac) = extraout_XMM0_Db_x00802;
  *(undefined4 *)(puVar4 + 0x4b6) = extraout_XMM0_Dc_x00802;
  *(undefined4 *)((long)puVar4 + 0x25b4) = extraout_XMM0_Dd_x00802;
  puVar4[-0x346] = 0x8fc829;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fc849;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x15a7) = extraout_XMM0_Da_x00803;
  *(undefined4 *)((long)puVar4 + 0xad3c) = extraout_XMM0_Db_x00803;
  *(undefined4 *)(puVar4 + 0x15a8) = extraout_XMM0_Dc_x00803;
  *(undefined4 *)((long)puVar4 + 0xad44) = extraout_XMM0_Dd_x00803;
  puVar4[-0x346] = 0x8fc85e;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x4b9) = extraout_XMM0_Da_x00804;
  *(undefined4 *)((long)puVar4 + 0x25cc) = extraout_XMM0_Db_x00804;
  *(undefined4 *)(puVar4 + 0x4ba) = extraout_XMM0_Dc_x00804;
  *(undefined4 *)((long)puVar4 + 0x25d4) = extraout_XMM0_Dd_x00804;
  puVar4[-0x346] = 0x8fc883;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fc893;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x15a5) = extraout_XMM0_Da_x00805;
  *(undefined4 *)((long)puVar4 + 0xad2c) = extraout_XMM0_Db_x00805;
  *(undefined4 *)(puVar4 + 0x15a6) = extraout_XMM0_Dc_x00805;
  *(undefined4 *)((long)puVar4 + 0xad34) = extraout_XMM0_Dd_x00805;
  puVar4[-0x346] = 0x8fc8b3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x15b4];
  *puVar1 = extraout_XMM0_Da_x00806;
  puVar1[1] = extraout_XMM0_Db_x00806;
  puVar1[2] = extraout_XMM0_Dc_x00806;
  puVar1[3] = extraout_XMM0_Dd_x00806;
  puVar4[-0x346] = 0x8fc8d3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x15ac];
  *puVar1 = extraout_XMM0_Da_x00807;
  puVar1[1] = extraout_XMM0_Db_x00807;
  puVar1[2] = extraout_XMM0_Dc_x00807;
  puVar1[3] = extraout_XMM0_Dd_x00807;
  puVar4[0x4bb] = puVar4[0x1dfb];
  puVar4[0x4bc] = puVar4[0x1dfc];
  puVar4[0x4bd] = puVar4[0x1df9];
  puVar4[0x4be] = puVar4[0x1dfa];
  puVar4[0x4bf] = puVar4[0x1df7];
  puVar4[0x4c0] = puVar4[0x1df8];
  puVar4[0x4c1] = puVar4[0x1df3];
  puVar4[0x4c2] = puVar4[0x1df4];
  puVar4[0x4c3] = puVar4[0x1df1];
  puVar4[0x4c4] = puVar4[0x1df2];
  puVar4[0x4c5] = puVar4[0x1def];
  puVar4[0x4c6] = puVar4[0x1df0];
  puVar4[-0x346] = 0x8fc948;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x15a3] = puVar4[0x4bb];
  puVar4[0x15a4] = puVar4[0x4bc];
  puVar4[0x15a1] = puVar4[0x4bd];
  puVar4[0x15a2] = puVar4[0x4be];
  puVar4[0x159f] = puVar4[0x4bf];
  puVar4[0x15a0] = puVar4[0x4c0];
  puVar4[0x159e] = puVar4[0xd0c];
  puVar4[0x159b] = puVar4[0x4c1];
  puVar4[0x159c] = puVar4[0x4c2];
  puVar4[0x1599] = puVar4[0x4c3];
  puVar4[0x159a] = puVar4[0x4c4];
  puVar4[0x1597] = puVar4[0x4c5];
  puVar4[0x1598] = puVar4[0x4c6];
  puVar4[0x1596] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x1593) = extraout_XMM0_Da_x00808;
  *(undefined4 *)((long)puVar4 + 0xac9c) = extraout_XMM0_Db_x00808;
  *(undefined4 *)(puVar4 + 0x1594) = extraout_XMM0_Dc_x00808;
  *(undefined4 *)((long)puVar4 + 0xaca4) = extraout_XMM0_Dd_x00808;
  uVar2 = ((undefined8 *)puVar4[0x1596])[1];
  puVar4[0x4c9] = *(undefined8 *)puVar4[0x1596];
  puVar4[0x4ca] = uVar2;
  puVar4[-0x346] = 0x8fc9f0;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x4c7) = extraout_XMM0_Da_x00809;
  *(undefined4 *)((long)puVar4 + 0x263c) = extraout_XMM0_Db_x00809;
  *(undefined4 *)(puVar4 + 0x4c8) = extraout_XMM0_Dc_x00809;
  *(undefined4 *)((long)puVar4 + 0x2644) = extraout_XMM0_Dd_x00809;
  puVar4[-0x346] = 0x8fca15;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fca35;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1591) = extraout_XMM0_Da_x00810;
  *(undefined4 *)((long)puVar4 + 0xac8c) = extraout_XMM0_Db_x00810;
  *(undefined4 *)(puVar4 + 0x1592) = extraout_XMM0_Dc_x00810;
  *(undefined4 *)((long)puVar4 + 0xac94) = extraout_XMM0_Dd_x00810;
  puVar4[-0x346] = 0x8fca4a;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x4cb) = extraout_XMM0_Da_x00811;
  *(undefined4 *)((long)puVar4 + 0x265c) = extraout_XMM0_Db_x00811;
  *(undefined4 *)(puVar4 + 0x4cc) = extraout_XMM0_Dc_x00811;
  *(undefined4 *)((long)puVar4 + 0x2664) = extraout_XMM0_Dd_x00811;
  puVar4[-0x346] = 0x8fca6f;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fca7f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x158f) = extraout_XMM0_Da_x00812;
  *(undefined4 *)((long)puVar4 + 0xac7c) = extraout_XMM0_Db_x00812;
  *(undefined4 *)(puVar4 + 0x1590) = extraout_XMM0_Dc_x00812;
  *(undefined4 *)((long)puVar4 + 0xac84) = extraout_XMM0_Dd_x00812;
  puVar4[-0x346] = 0x8fca9f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x159e];
  *puVar1 = extraout_XMM0_Da_x00813;
  puVar1[1] = extraout_XMM0_Db_x00813;
  puVar1[2] = extraout_XMM0_Dc_x00813;
  puVar1[3] = extraout_XMM0_Dd_x00813;
  puVar4[-0x346] = 0x8fcabf;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1596];
  *puVar1 = extraout_XMM0_Da_x00814;
  puVar1[1] = extraout_XMM0_Db_x00814;
  puVar1[2] = extraout_XMM0_Dc_x00814;
  puVar1[3] = extraout_XMM0_Dd_x00814;
  puVar4[0x4cd] = puVar4[0x1dfd];
  puVar4[0x4ce] = puVar4[0x1dfe];
  puVar4[0x4cf] = puVar4[0x1dfb];
  puVar4[0x4d0] = puVar4[0x1dfc];
  puVar4[0x4d1] = puVar4[0x1df9];
  puVar4[0x4d2] = puVar4[0x1dfa];
  puVar4[0x4d3] = puVar4[0x1df5];
  puVar4[0x4d4] = puVar4[0x1df6];
  puVar4[0x4d5] = puVar4[0x1df3];
  puVar4[0x4d6] = puVar4[0x1df4];
  puVar4[0x4d7] = puVar4[0x1df1];
  puVar4[0x4d8] = puVar4[0x1df2];
  puVar4[-0x346] = 0x8fcb34;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x158d] = puVar4[0x4cd];
  puVar4[0x158e] = puVar4[0x4ce];
  puVar4[0x158b] = puVar4[0x4cf];
  puVar4[0x158c] = puVar4[0x4d0];
  puVar4[0x1589] = puVar4[0x4d1];
  puVar4[0x158a] = puVar4[0x4d2];
  puVar4[0x1588] = puVar4[0xcb6];
  puVar4[0x1585] = puVar4[0x4d3];
  puVar4[0x1586] = puVar4[0x4d4];
  puVar4[0x1583] = puVar4[0x4d5];
  puVar4[0x1584] = puVar4[0x4d6];
  puVar4[0x1581] = puVar4[0x4d7];
  puVar4[0x1582] = puVar4[0x4d8];
  puVar4[0x1580] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x157d) = extraout_XMM0_Da_x00815;
  *(undefined4 *)((long)puVar4 + 0xabec) = extraout_XMM0_Db_x00815;
  *(undefined4 *)(puVar4 + 0x157e) = extraout_XMM0_Dc_x00815;
  *(undefined4 *)((long)puVar4 + 0xabf4) = extraout_XMM0_Dd_x00815;
  uVar2 = ((undefined8 *)puVar4[0x1580])[1];
  puVar4[0x4db] = *(undefined8 *)puVar4[0x1580];
  puVar4[0x4dc] = uVar2;
  puVar4[-0x346] = 0x8fcbdc;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x4d9) = extraout_XMM0_Da_x00816;
  *(undefined4 *)((long)puVar4 + 0x26cc) = extraout_XMM0_Db_x00816;
  *(undefined4 *)(puVar4 + 0x4da) = extraout_XMM0_Dc_x00816;
  *(undefined4 *)((long)puVar4 + 0x26d4) = extraout_XMM0_Dd_x00816;
  puVar4[-0x346] = 0x8fcc01;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fcc21;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x157b) = extraout_XMM0_Da_x00817;
  *(undefined4 *)((long)puVar4 + 0xabdc) = extraout_XMM0_Db_x00817;
  *(undefined4 *)(puVar4 + 0x157c) = extraout_XMM0_Dc_x00817;
  *(undefined4 *)((long)puVar4 + 0xabe4) = extraout_XMM0_Dd_x00817;
  puVar4[-0x346] = 0x8fcc36;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x4dd) = extraout_XMM0_Da_x00818;
  *(undefined4 *)((long)puVar4 + 0x26ec) = extraout_XMM0_Db_x00818;
  *(undefined4 *)(puVar4 + 0x4de) = extraout_XMM0_Dc_x00818;
  *(undefined4 *)((long)puVar4 + 0x26f4) = extraout_XMM0_Dd_x00818;
  puVar4[-0x346] = 0x8fcc5b;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fcc6b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1579) = extraout_XMM0_Da_x00819;
  *(undefined4 *)((long)puVar4 + 0xabcc) = extraout_XMM0_Db_x00819;
  *(undefined4 *)(puVar4 + 0x157a) = extraout_XMM0_Dc_x00819;
  *(undefined4 *)((long)puVar4 + 0xabd4) = extraout_XMM0_Dd_x00819;
  puVar4[-0x346] = 0x8fcc8b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1588];
  *puVar1 = extraout_XMM0_Da_x00820;
  puVar1[1] = extraout_XMM0_Db_x00820;
  puVar1[2] = extraout_XMM0_Dc_x00820;
  puVar1[3] = extraout_XMM0_Dd_x00820;
  puVar4[-0x346] = 0x8fccab;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1580];
  *puVar1 = extraout_XMM0_Da_x00821;
  puVar1[1] = extraout_XMM0_Db_x00821;
  puVar1[2] = extraout_XMM0_Dc_x00821;
  puVar1[3] = extraout_XMM0_Dd_x00821;
  puVar4[0x4df] = puVar4[0x1def];
  puVar4[0x4e0] = puVar4[0x1df0];
  puVar4[0x4e1] = puVar4[0x1dfd];
  puVar4[0x4e2] = puVar4[0x1dfe];
  puVar4[0x4e3] = puVar4[0x1dfb];
  puVar4[0x4e4] = puVar4[0x1dfc];
  puVar4[0x4e5] = puVar4[0x1df7];
  puVar4[0x4e6] = puVar4[0x1df8];
  puVar4[0x4e7] = puVar4[0x1df5];
  puVar4[0x4e8] = puVar4[0x1df6];
  puVar4[0x4e9] = puVar4[0x1df3];
  puVar4[0x4ea] = puVar4[0x1df4];
  puVar4[-0x346] = 0x8fcd20;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1577] = puVar4[0x4df];
  puVar4[0x1578] = puVar4[0x4e0];
  puVar4[0x1575] = puVar4[0x4e1];
  puVar4[0x1576] = puVar4[0x4e2];
  puVar4[0x1573] = puVar4[0x4e3];
  puVar4[0x1574] = puVar4[0x4e4];
  puVar4[0x1572] = puVar4[0xcd4];
  puVar4[0x156f] = puVar4[0x4e5];
  puVar4[0x1570] = puVar4[0x4e6];
  puVar4[0x156d] = puVar4[0x4e7];
  puVar4[0x156e] = puVar4[0x4e8];
  puVar4[0x156b] = puVar4[0x4e9];
  puVar4[0x156c] = puVar4[0x4ea];
  puVar4[0x156a] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x1567) = extraout_XMM0_Da_x00822;
  *(undefined4 *)((long)puVar4 + 0xab3c) = extraout_XMM0_Db_x00822;
  *(undefined4 *)(puVar4 + 0x1568) = extraout_XMM0_Dc_x00822;
  *(undefined4 *)((long)puVar4 + 0xab44) = extraout_XMM0_Dd_x00822;
  uVar2 = ((undefined8 *)puVar4[0x156a])[1];
  puVar4[0x4ed] = *(undefined8 *)puVar4[0x156a];
  puVar4[0x4ee] = uVar2;
  puVar4[-0x346] = 0x8fcdc8;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x4eb) = extraout_XMM0_Da_x00823;
  *(undefined4 *)((long)puVar4 + 0x275c) = extraout_XMM0_Db_x00823;
  *(undefined4 *)(puVar4 + 0x4ec) = extraout_XMM0_Dc_x00823;
  *(undefined4 *)((long)puVar4 + 0x2764) = extraout_XMM0_Dd_x00823;
  puVar4[-0x346] = 0x8fcded;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fce0d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1565) = extraout_XMM0_Da_x00824;
  *(undefined4 *)((long)puVar4 + 0xab2c) = extraout_XMM0_Db_x00824;
  *(undefined4 *)(puVar4 + 0x1566) = extraout_XMM0_Dc_x00824;
  *(undefined4 *)((long)puVar4 + 0xab34) = extraout_XMM0_Dd_x00824;
  puVar4[-0x346] = 0x8fce22;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x4ef) = extraout_XMM0_Da_x00825;
  *(undefined4 *)((long)puVar4 + 0x277c) = extraout_XMM0_Db_x00825;
  *(undefined4 *)(puVar4 + 0x4f0) = extraout_XMM0_Dc_x00825;
  *(undefined4 *)((long)puVar4 + 0x2784) = extraout_XMM0_Dd_x00825;
  puVar4[-0x346] = 0x8fce47;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fce57;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1563) = extraout_XMM0_Da_x00826;
  *(undefined4 *)((long)puVar4 + 0xab1c) = extraout_XMM0_Db_x00826;
  *(undefined4 *)(puVar4 + 0x1564) = extraout_XMM0_Dc_x00826;
  *(undefined4 *)((long)puVar4 + 0xab24) = extraout_XMM0_Dd_x00826;
  puVar4[-0x346] = 0x8fce77;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1572];
  *puVar1 = extraout_XMM0_Da_x00827;
  puVar1[1] = extraout_XMM0_Db_x00827;
  puVar1[2] = extraout_XMM0_Dc_x00827;
  puVar1[3] = extraout_XMM0_Dd_x00827;
  puVar4[-0x346] = 0x8fce97;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x156a];
  *puVar1 = extraout_XMM0_Da_x00828;
  puVar1[1] = extraout_XMM0_Db_x00828;
  puVar1[2] = extraout_XMM0_Dc_x00828;
  puVar1[3] = extraout_XMM0_Dd_x00828;
  puVar4[0x4f1] = puVar4[0x1df1];
  puVar4[0x4f2] = puVar4[0x1df2];
  puVar4[0x4f3] = puVar4[0x1def];
  puVar4[0x4f4] = puVar4[0x1df0];
  puVar4[0x4f5] = puVar4[0x1dfd];
  puVar4[0x4f6] = puVar4[0x1dfe];
  puVar4[0x4f7] = puVar4[0x1df9];
  puVar4[0x4f8] = puVar4[0x1dfa];
  puVar4[0x4f9] = puVar4[0x1df7];
  puVar4[0x4fa] = puVar4[0x1df8];
  puVar4[0x4fb] = puVar4[0x1df5];
  puVar4[0x4fc] = puVar4[0x1df6];
  puVar4[-0x346] = 0x8fcf0c;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1561] = puVar4[0x4f1];
  puVar4[0x1562] = puVar4[0x4f2];
  puVar4[0x155f] = puVar4[0x4f3];
  puVar4[0x1560] = puVar4[0x4f4];
  puVar4[0x155d] = puVar4[0x4f5];
  puVar4[0x155e] = puVar4[0x4f6];
  puVar4[0x155c] = puVar4[0xcf4];
  puVar4[0x1559] = puVar4[0x4f7];
  puVar4[0x155a] = puVar4[0x4f8];
  puVar4[0x1557] = puVar4[0x4f9];
  puVar4[0x1558] = puVar4[0x4fa];
  puVar4[0x1555] = puVar4[0x4fb];
  puVar4[0x1556] = puVar4[0x4fc];
  puVar4[0x1554] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x1551) = extraout_XMM0_Da_x00829;
  *(undefined4 *)((long)puVar4 + 0xaa8c) = extraout_XMM0_Db_x00829;
  *(undefined4 *)(puVar4 + 0x1552) = extraout_XMM0_Dc_x00829;
  *(undefined4 *)((long)puVar4 + 0xaa94) = extraout_XMM0_Dd_x00829;
  uVar2 = ((undefined8 *)puVar4[0x1554])[1];
  puVar4[0x4ff] = *(undefined8 *)puVar4[0x1554];
  puVar4[0x500] = uVar2;
  puVar4[-0x346] = 0x8fcfb4;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x4fd) = extraout_XMM0_Da_x00830;
  *(undefined4 *)((long)puVar4 + 0x27ec) = extraout_XMM0_Db_x00830;
  *(undefined4 *)(puVar4 + 0x4fe) = extraout_XMM0_Dc_x00830;
  *(undefined4 *)((long)puVar4 + 0x27f4) = extraout_XMM0_Dd_x00830;
  puVar4[-0x346] = 0x8fcfd9;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fcff9;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x154f) = extraout_XMM0_Da_x00831;
  *(undefined4 *)((long)puVar4 + 0xaa7c) = extraout_XMM0_Db_x00831;
  *(undefined4 *)(puVar4 + 0x1550) = extraout_XMM0_Dc_x00831;
  *(undefined4 *)((long)puVar4 + 0xaa84) = extraout_XMM0_Dd_x00831;
  puVar4[-0x346] = 0x8fd00e;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x501) = extraout_XMM0_Da_x00832;
  *(undefined4 *)((long)puVar4 + 0x280c) = extraout_XMM0_Db_x00832;
  *(undefined4 *)(puVar4 + 0x502) = extraout_XMM0_Dc_x00832;
  *(undefined4 *)((long)puVar4 + 0x2814) = extraout_XMM0_Dd_x00832;
  puVar4[-0x346] = 0x8fd033;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fd043;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x154d) = extraout_XMM0_Da_x00833;
  *(undefined4 *)((long)puVar4 + 0xaa6c) = extraout_XMM0_Db_x00833;
  *(undefined4 *)(puVar4 + 0x154e) = extraout_XMM0_Dc_x00833;
  *(undefined4 *)((long)puVar4 + 0xaa74) = extraout_XMM0_Dd_x00833;
  puVar4[-0x346] = 0x8fd063;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x155c];
  *puVar1 = extraout_XMM0_Da_x00834;
  puVar1[1] = extraout_XMM0_Db_x00834;
  puVar1[2] = extraout_XMM0_Dc_x00834;
  puVar1[3] = extraout_XMM0_Dd_x00834;
  puVar4[-0x346] = 0x8fd083;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1554];
  *puVar1 = extraout_XMM0_Da_x00835;
  puVar1[1] = extraout_XMM0_Db_x00835;
  puVar1[2] = extraout_XMM0_Dc_x00835;
  puVar1[3] = extraout_XMM0_Dd_x00835;
  puVar4[0x503] = puVar4[0x1df3];
  puVar4[0x504] = puVar4[0x1df4];
  puVar4[0x505] = puVar4[0x1df1];
  puVar4[0x506] = puVar4[0x1df2];
  puVar4[0x507] = puVar4[0x1def];
  puVar4[0x508] = puVar4[0x1df0];
  puVar4[0x509] = puVar4[0x1dfb];
  puVar4[0x50a] = puVar4[0x1dfc];
  puVar4[0x50b] = puVar4[0x1df9];
  puVar4[0x50c] = puVar4[0x1dfa];
  puVar4[0x50d] = puVar4[0x1df7];
  puVar4[0x50e] = puVar4[0x1df8];
  puVar4[-0x346] = 0x8fd0f8;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x154b] = puVar4[0x503];
  puVar4[0x154c] = puVar4[0x504];
  puVar4[0x1549] = puVar4[0x505];
  puVar4[0x154a] = puVar4[0x506];
  puVar4[0x1547] = puVar4[0x507];
  puVar4[0x1548] = puVar4[0x508];
  puVar4[0x1546] = puVar4[0xd14];
  puVar4[0x1543] = puVar4[0x509];
  puVar4[0x1544] = puVar4[0x50a];
  puVar4[0x1541] = puVar4[0x50b];
  puVar4[0x1542] = puVar4[0x50c];
  puVar4[0x153f] = puVar4[0x50d];
  puVar4[0x1540] = puVar4[0x50e];
  puVar4[0x153e] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x153b) = extraout_XMM0_Da_x00836;
  *(undefined4 *)((long)puVar4 + 0xa9dc) = extraout_XMM0_Db_x00836;
  *(undefined4 *)(puVar4 + 0x153c) = extraout_XMM0_Dc_x00836;
  *(undefined4 *)((long)puVar4 + 0xa9e4) = extraout_XMM0_Dd_x00836;
  uVar2 = ((undefined8 *)puVar4[0x153e])[1];
  puVar4[0x511] = *(undefined8 *)puVar4[0x153e];
  puVar4[0x512] = uVar2;
  puVar4[-0x346] = 0x8fd1a0;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x50f) = extraout_XMM0_Da_x00837;
  *(undefined4 *)((long)puVar4 + 0x287c) = extraout_XMM0_Db_x00837;
  *(undefined4 *)(puVar4 + 0x510) = extraout_XMM0_Dc_x00837;
  *(undefined4 *)((long)puVar4 + 0x2884) = extraout_XMM0_Dd_x00837;
  puVar4[-0x346] = 0x8fd1c5;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fd1e5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1539) = extraout_XMM0_Da_x00838;
  *(undefined4 *)((long)puVar4 + 0xa9cc) = extraout_XMM0_Db_x00838;
  *(undefined4 *)(puVar4 + 0x153a) = extraout_XMM0_Dc_x00838;
  *(undefined4 *)((long)puVar4 + 0xa9d4) = extraout_XMM0_Dd_x00838;
  puVar4[-0x346] = 0x8fd1fa;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x513) = extraout_XMM0_Da_x00839;
  *(undefined4 *)((long)puVar4 + 0x289c) = extraout_XMM0_Db_x00839;
  *(undefined4 *)(puVar4 + 0x514) = extraout_XMM0_Dc_x00839;
  *(undefined4 *)((long)puVar4 + 0x28a4) = extraout_XMM0_Dd_x00839;
  puVar4[-0x346] = 0x8fd21f;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fd22f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1537) = extraout_XMM0_Da_x00840;
  *(undefined4 *)((long)puVar4 + 0xa9bc) = extraout_XMM0_Db_x00840;
  *(undefined4 *)(puVar4 + 0x1538) = extraout_XMM0_Dc_x00840;
  *(undefined4 *)((long)puVar4 + 0xa9c4) = extraout_XMM0_Dd_x00840;
  puVar4[-0x346] = 0x8fd24f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1546];
  *puVar1 = extraout_XMM0_Da_x00841;
  puVar1[1] = extraout_XMM0_Db_x00841;
  puVar1[2] = extraout_XMM0_Dc_x00841;
  puVar1[3] = extraout_XMM0_Dd_x00841;
  puVar4[-0x346] = 0x8fd26f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x153e];
  *puVar1 = extraout_XMM0_Da_x00842;
  puVar1[1] = extraout_XMM0_Db_x00842;
  puVar1[2] = extraout_XMM0_Dc_x00842;
  puVar1[3] = extraout_XMM0_Dd_x00842;
  puVar4[0x515] = puVar4[0x1df5];
  puVar4[0x516] = puVar4[0x1df6];
  puVar4[0x517] = puVar4[0x1df3];
  puVar4[0x518] = puVar4[0x1df4];
  puVar4[0x519] = puVar4[0x1df1];
  puVar4[0x51a] = puVar4[0x1df2];
  puVar4[0x51b] = puVar4[0x1dfd];
  puVar4[0x51c] = puVar4[0x1dfe];
  puVar4[0x51d] = puVar4[0x1dfb];
  puVar4[0x51e] = puVar4[0x1dfc];
  puVar4[0x51f] = puVar4[0x1df9];
  puVar4[0x520] = puVar4[0x1dfa];
  puVar4[-0x346] = 0x8fd2e4;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1535] = puVar4[0x515];
  puVar4[0x1536] = puVar4[0x516];
  puVar4[0x1533] = puVar4[0x517];
  puVar4[0x1534] = puVar4[0x518];
  puVar4[0x1531] = puVar4[0x519];
  puVar4[0x1532] = puVar4[0x51a];
  puVar4[0x1530] = puVar4[0xcae];
  puVar4[0x152d] = puVar4[0x51b];
  puVar4[0x152e] = puVar4[0x51c];
  puVar4[0x152b] = puVar4[0x51d];
  puVar4[0x152c] = puVar4[0x51e];
  puVar4[0x1529] = puVar4[0x51f];
  puVar4[0x152a] = puVar4[0x520];
  puVar4[0x1528] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x1525) = extraout_XMM0_Da_x00843;
  *(undefined4 *)((long)puVar4 + 0xa92c) = extraout_XMM0_Db_x00843;
  *(undefined4 *)(puVar4 + 0x1526) = extraout_XMM0_Dc_x00843;
  *(undefined4 *)((long)puVar4 + 0xa934) = extraout_XMM0_Dd_x00843;
  uVar2 = ((undefined8 *)puVar4[0x1528])[1];
  puVar4[0x523] = *(undefined8 *)puVar4[0x1528];
  puVar4[0x524] = uVar2;
  puVar4[-0x346] = 0x8fd38c;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x521) = extraout_XMM0_Da_x00844;
  *(undefined4 *)((long)puVar4 + 0x290c) = extraout_XMM0_Db_x00844;
  *(undefined4 *)(puVar4 + 0x522) = extraout_XMM0_Dc_x00844;
  *(undefined4 *)((long)puVar4 + 0x2914) = extraout_XMM0_Dd_x00844;
  puVar4[-0x346] = 0x8fd3b1;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fd3d1;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1523) = extraout_XMM0_Da_x00845;
  *(undefined4 *)((long)puVar4 + 0xa91c) = extraout_XMM0_Db_x00845;
  *(undefined4 *)(puVar4 + 0x1524) = extraout_XMM0_Dc_x00845;
  *(undefined4 *)((long)puVar4 + 0xa924) = extraout_XMM0_Dd_x00845;
  puVar4[-0x346] = 0x8fd3e6;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x525) = extraout_XMM0_Da_x00846;
  *(undefined4 *)((long)puVar4 + 0x292c) = extraout_XMM0_Db_x00846;
  *(undefined4 *)(puVar4 + 0x526) = extraout_XMM0_Dc_x00846;
  *(undefined4 *)((long)puVar4 + 0x2934) = extraout_XMM0_Dd_x00846;
  puVar4[-0x346] = 0x8fd40b;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fd41b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1521) = extraout_XMM0_Da_x00847;
  *(undefined4 *)((long)puVar4 + 0xa90c) = extraout_XMM0_Db_x00847;
  *(undefined4 *)(puVar4 + 0x1522) = extraout_XMM0_Dc_x00847;
  *(undefined4 *)((long)puVar4 + 0xa914) = extraout_XMM0_Dd_x00847;
  puVar4[-0x346] = 0x8fd43b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1530];
  *puVar1 = extraout_XMM0_Da_x00848;
  puVar1[1] = extraout_XMM0_Db_x00848;
  puVar1[2] = extraout_XMM0_Dc_x00848;
  puVar1[3] = extraout_XMM0_Dd_x00848;
  puVar4[-0x346] = 0x8fd45b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1528];
  *puVar1 = extraout_XMM0_Da_x00849;
  puVar1[1] = extraout_XMM0_Db_x00849;
  puVar1[2] = extraout_XMM0_Dc_x00849;
  puVar1[3] = extraout_XMM0_Dd_x00849;
  puVar4[0x527] = puVar4[0x1df7];
  puVar4[0x528] = puVar4[0x1df8];
  puVar4[0x529] = puVar4[0x1df5];
  puVar4[0x52a] = puVar4[0x1df6];
  puVar4[0x52b] = puVar4[0x1df3];
  puVar4[0x52c] = puVar4[0x1df4];
  puVar4[0x52d] = puVar4[0x1def];
  puVar4[0x52e] = puVar4[0x1df0];
  puVar4[0x52f] = puVar4[0x1dfd];
  puVar4[0x530] = puVar4[0x1dfe];
  puVar4[0x531] = puVar4[0x1dfb];
  puVar4[0x532] = puVar4[0x1dfc];
  puVar4[-0x346] = 0x8fd4d0;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x151f] = puVar4[0x527];
  puVar4[0x1520] = puVar4[0x528];
  puVar4[0x151d] = puVar4[0x529];
  puVar4[0x151e] = puVar4[0x52a];
  puVar4[0x151b] = puVar4[0x52b];
  puVar4[0x151c] = puVar4[0x52c];
  puVar4[0x151a] = puVar4[0xccc];
  puVar4[0x1517] = puVar4[0x52d];
  puVar4[0x1518] = puVar4[0x52e];
  puVar4[0x1515] = puVar4[0x52f];
  puVar4[0x1516] = puVar4[0x530];
  puVar4[0x1513] = puVar4[0x531];
  puVar4[0x1514] = puVar4[0x532];
  puVar4[0x1512] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x150f) = extraout_XMM0_Da_x00850;
  *(undefined4 *)((long)puVar4 + 0xa87c) = extraout_XMM0_Db_x00850;
  *(undefined4 *)(puVar4 + 0x1510) = extraout_XMM0_Dc_x00850;
  *(undefined4 *)((long)puVar4 + 0xa884) = extraout_XMM0_Dd_x00850;
  uVar2 = ((undefined8 *)puVar4[0x1512])[1];
  puVar4[0x535] = *(undefined8 *)puVar4[0x1512];
  puVar4[0x536] = uVar2;
  puVar4[-0x346] = 0x8fd578;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x533) = extraout_XMM0_Da_x00851;
  *(undefined4 *)((long)puVar4 + 0x299c) = extraout_XMM0_Db_x00851;
  *(undefined4 *)(puVar4 + 0x534) = extraout_XMM0_Dc_x00851;
  *(undefined4 *)((long)puVar4 + 0x29a4) = extraout_XMM0_Dd_x00851;
  puVar4[-0x346] = 0x8fd59d;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fd5bd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x150d) = extraout_XMM0_Da_x00852;
  *(undefined4 *)((long)puVar4 + 0xa86c) = extraout_XMM0_Db_x00852;
  *(undefined4 *)(puVar4 + 0x150e) = extraout_XMM0_Dc_x00852;
  *(undefined4 *)((long)puVar4 + 0xa874) = extraout_XMM0_Dd_x00852;
  puVar4[-0x346] = 0x8fd5d2;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x537) = extraout_XMM0_Da_x00853;
  *(undefined4 *)((long)puVar4 + 0x29bc) = extraout_XMM0_Db_x00853;
  *(undefined4 *)(puVar4 + 0x538) = extraout_XMM0_Dc_x00853;
  *(undefined4 *)((long)puVar4 + 0x29c4) = extraout_XMM0_Dd_x00853;
  puVar4[-0x346] = 0x8fd5f7;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fd607;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x150b) = extraout_XMM0_Da_x00854;
  *(undefined4 *)((long)puVar4 + 0xa85c) = extraout_XMM0_Db_x00854;
  *(undefined4 *)(puVar4 + 0x150c) = extraout_XMM0_Dc_x00854;
  *(undefined4 *)((long)puVar4 + 0xa864) = extraout_XMM0_Dd_x00854;
  puVar4[-0x346] = 0x8fd627;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x151a];
  *puVar1 = extraout_XMM0_Da_x00855;
  puVar1[1] = extraout_XMM0_Db_x00855;
  puVar1[2] = extraout_XMM0_Dc_x00855;
  puVar1[3] = extraout_XMM0_Dd_x00855;
  puVar4[-0x346] = 0x8fd647;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1512];
  *puVar1 = extraout_XMM0_Da_x00856;
  puVar1[1] = extraout_XMM0_Db_x00856;
  puVar1[2] = extraout_XMM0_Dc_x00856;
  puVar1[3] = extraout_XMM0_Dd_x00856;
  puVar4[0x539] = puVar4[0x1df9];
  puVar4[0x53a] = puVar4[0x1dfa];
  puVar4[0x53b] = puVar4[0x1df7];
  puVar4[0x53c] = puVar4[0x1df8];
  puVar4[0x53d] = puVar4[0x1df5];
  puVar4[0x53e] = puVar4[0x1df6];
  puVar4[0x53f] = puVar4[0x1df1];
  puVar4[0x540] = puVar4[0x1df2];
  puVar4[0x541] = puVar4[0x1def];
  puVar4[0x542] = puVar4[0x1df0];
  puVar4[0x543] = puVar4[0x1dfd];
  puVar4[0x544] = puVar4[0x1dfe];
  puVar4[-0x346] = 0x8fd6bc;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1509] = puVar4[0x539];
  puVar4[0x150a] = puVar4[0x53a];
  puVar4[0x1507] = puVar4[0x53b];
  puVar4[0x1508] = puVar4[0x53c];
  puVar4[0x1505] = puVar4[0x53d];
  puVar4[0x1506] = puVar4[0x53e];
  puVar4[0x1504] = puVar4[0xcec];
  puVar4[0x1501] = puVar4[0x53f];
  puVar4[0x1502] = puVar4[0x540];
  puVar4[0x14ff] = puVar4[0x541];
  puVar4[0x1500] = puVar4[0x542];
  puVar4[0x14fd] = puVar4[0x543];
  puVar4[0x14fe] = puVar4[0x544];
  puVar4[0x14fc] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x14f9) = extraout_XMM0_Da_x00857;
  *(undefined4 *)((long)puVar4 + 0xa7cc) = extraout_XMM0_Db_x00857;
  *(undefined4 *)(puVar4 + 0x14fa) = extraout_XMM0_Dc_x00857;
  *(undefined4 *)((long)puVar4 + 0xa7d4) = extraout_XMM0_Dd_x00857;
  uVar2 = ((undefined8 *)puVar4[0x14fc])[1];
  puVar4[0x547] = *(undefined8 *)puVar4[0x14fc];
  puVar4[0x548] = uVar2;
  puVar4[-0x346] = 0x8fd764;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x545) = extraout_XMM0_Da_x00858;
  *(undefined4 *)((long)puVar4 + 0x2a2c) = extraout_XMM0_Db_x00858;
  *(undefined4 *)(puVar4 + 0x546) = extraout_XMM0_Dc_x00858;
  *(undefined4 *)((long)puVar4 + 0x2a34) = extraout_XMM0_Dd_x00858;
  puVar4[-0x346] = 0x8fd789;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fd7a9;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x14f7) = extraout_XMM0_Da_x00859;
  *(undefined4 *)((long)puVar4 + 0xa7bc) = extraout_XMM0_Db_x00859;
  *(undefined4 *)(puVar4 + 0x14f8) = extraout_XMM0_Dc_x00859;
  *(undefined4 *)((long)puVar4 + 0xa7c4) = extraout_XMM0_Dd_x00859;
  puVar4[-0x346] = 0x8fd7be;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x549) = extraout_XMM0_Da_x00860;
  *(undefined4 *)((long)puVar4 + 0x2a4c) = extraout_XMM0_Db_x00860;
  *(undefined4 *)(puVar4 + 0x54a) = extraout_XMM0_Dc_x00860;
  *(undefined4 *)((long)puVar4 + 0x2a54) = extraout_XMM0_Dd_x00860;
  puVar4[-0x346] = 0x8fd7e3;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fd7f3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x14f5) = extraout_XMM0_Da_x00861;
  *(undefined4 *)((long)puVar4 + 0xa7ac) = extraout_XMM0_Db_x00861;
  *(undefined4 *)(puVar4 + 0x14f6) = extraout_XMM0_Dc_x00861;
  *(undefined4 *)((long)puVar4 + 0xa7b4) = extraout_XMM0_Dd_x00861;
  puVar4[-0x346] = 0x8fd813;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1504];
  *puVar1 = extraout_XMM0_Da_x00862;
  puVar1[1] = extraout_XMM0_Db_x00862;
  puVar1[2] = extraout_XMM0_Dc_x00862;
  puVar1[3] = extraout_XMM0_Dd_x00862;
  puVar4[-0x346] = 0x8fd833;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x14fc];
  *puVar1 = extraout_XMM0_Da_x00863;
  puVar1[1] = extraout_XMM0_Db_x00863;
  puVar1[2] = extraout_XMM0_Dc_x00863;
  puVar1[3] = extraout_XMM0_Dd_x00863;
  puVar4[0x54b] = puVar4[0x1dfb];
  puVar4[0x54c] = puVar4[0x1dfc];
  puVar4[0x54d] = puVar4[0x1df9];
  puVar4[0x54e] = puVar4[0x1dfa];
  puVar4[0x54f] = puVar4[0x1df7];
  puVar4[0x550] = puVar4[0x1df8];
  puVar4[0x551] = puVar4[0x1df3];
  puVar4[0x552] = puVar4[0x1df4];
  puVar4[0x553] = puVar4[0x1df1];
  puVar4[0x554] = puVar4[0x1df2];
  puVar4[0x555] = puVar4[0x1def];
  puVar4[0x556] = puVar4[0x1df0];
  puVar4[-0x346] = 0x8fd8a8;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x14f3] = puVar4[0x54b];
  puVar4[0x14f4] = puVar4[0x54c];
  puVar4[0x14f1] = puVar4[0x54d];
  puVar4[0x14f2] = puVar4[0x54e];
  puVar4[0x14ef] = puVar4[0x54f];
  puVar4[0x14f0] = puVar4[0x550];
  puVar4[0x14ee] = puVar4[0xd0c];
  puVar4[0x14eb] = puVar4[0x551];
  puVar4[0x14ec] = puVar4[0x552];
  puVar4[0x14e9] = puVar4[0x553];
  puVar4[0x14ea] = puVar4[0x554];
  puVar4[0x14e7] = puVar4[0x555];
  puVar4[0x14e8] = puVar4[0x556];
  puVar4[0x14e6] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x14e3) = extraout_XMM0_Da_x00864;
  *(undefined4 *)((long)puVar4 + 0xa71c) = extraout_XMM0_Db_x00864;
  *(undefined4 *)(puVar4 + 0x14e4) = extraout_XMM0_Dc_x00864;
  *(undefined4 *)((long)puVar4 + 0xa724) = extraout_XMM0_Dd_x00864;
  uVar2 = ((undefined8 *)puVar4[0x14e6])[1];
  puVar4[0x559] = *(undefined8 *)puVar4[0x14e6];
  puVar4[0x55a] = uVar2;
  puVar4[-0x346] = 0x8fd950;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x557) = extraout_XMM0_Da_x00865;
  *(undefined4 *)((long)puVar4 + 0x2abc) = extraout_XMM0_Db_x00865;
  *(undefined4 *)(puVar4 + 0x558) = extraout_XMM0_Dc_x00865;
  *(undefined4 *)((long)puVar4 + 0x2ac4) = extraout_XMM0_Dd_x00865;
  puVar4[-0x346] = 0x8fd975;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fd995;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x14e1) = extraout_XMM0_Da_x00866;
  *(undefined4 *)((long)puVar4 + 0xa70c) = extraout_XMM0_Db_x00866;
  *(undefined4 *)(puVar4 + 0x14e2) = extraout_XMM0_Dc_x00866;
  *(undefined4 *)((long)puVar4 + 0xa714) = extraout_XMM0_Dd_x00866;
  puVar4[-0x346] = 0x8fd9aa;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x55b) = extraout_XMM0_Da_x00867;
  *(undefined4 *)((long)puVar4 + 0x2adc) = extraout_XMM0_Db_x00867;
  *(undefined4 *)(puVar4 + 0x55c) = extraout_XMM0_Dc_x00867;
  *(undefined4 *)((long)puVar4 + 0x2ae4) = extraout_XMM0_Dd_x00867;
  puVar4[-0x346] = 0x8fd9cf;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fd9df;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x14df) = extraout_XMM0_Da_x00868;
  *(undefined4 *)((long)puVar4 + 0xa6fc) = extraout_XMM0_Db_x00868;
  *(undefined4 *)(puVar4 + 0x14e0) = extraout_XMM0_Dc_x00868;
  *(undefined4 *)((long)puVar4 + 0xa704) = extraout_XMM0_Dd_x00868;
  puVar4[-0x346] = 0x8fd9ff;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x14ee];
  *puVar1 = extraout_XMM0_Da_x00869;
  puVar1[1] = extraout_XMM0_Db_x00869;
  puVar1[2] = extraout_XMM0_Dc_x00869;
  puVar1[3] = extraout_XMM0_Dd_x00869;
  puVar4[-0x346] = 0x8fda1f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x14e6];
  *puVar1 = extraout_XMM0_Da_x00870;
  puVar1[1] = extraout_XMM0_Db_x00870;
  puVar1[2] = extraout_XMM0_Dc_x00870;
  puVar1[3] = extraout_XMM0_Dd_x00870;
  puVar4[0x55d] = puVar4[0x1dfd];
  puVar4[0x55e] = puVar4[0x1dfe];
  puVar4[0x55f] = puVar4[0x1dfb];
  puVar4[0x560] = puVar4[0x1dfc];
  puVar4[0x561] = puVar4[0x1df9];
  puVar4[0x562] = puVar4[0x1dfa];
  puVar4[0x563] = puVar4[0x1df5];
  puVar4[0x564] = puVar4[0x1df6];
  puVar4[0x565] = puVar4[0x1df3];
  puVar4[0x566] = puVar4[0x1df4];
  puVar4[0x567] = puVar4[0x1df1];
  puVar4[0x568] = puVar4[0x1df2];
  puVar4[-0x346] = 0x8fda94;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x14dd] = puVar4[0x55d];
  puVar4[0x14de] = puVar4[0x55e];
  puVar4[0x14db] = puVar4[0x55f];
  puVar4[0x14dc] = puVar4[0x560];
  puVar4[0x14d9] = puVar4[0x561];
  puVar4[0x14da] = puVar4[0x562];
  puVar4[0x14d8] = puVar4[0xcb6];
  puVar4[0x14d5] = puVar4[0x563];
  puVar4[0x14d6] = puVar4[0x564];
  puVar4[0x14d3] = puVar4[0x565];
  puVar4[0x14d4] = puVar4[0x566];
  puVar4[0x14d1] = puVar4[0x567];
  puVar4[0x14d2] = puVar4[0x568];
  puVar4[0x14d0] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x14cd) = extraout_XMM0_Da_x00871;
  *(undefined4 *)((long)puVar4 + 0xa66c) = extraout_XMM0_Db_x00871;
  *(undefined4 *)(puVar4 + 0x14ce) = extraout_XMM0_Dc_x00871;
  *(undefined4 *)((long)puVar4 + 0xa674) = extraout_XMM0_Dd_x00871;
  uVar2 = ((undefined8 *)puVar4[0x14d0])[1];
  puVar4[0x56b] = *(undefined8 *)puVar4[0x14d0];
  puVar4[0x56c] = uVar2;
  puVar4[-0x346] = 0x8fdb3c;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x569) = extraout_XMM0_Da_x00872;
  *(undefined4 *)((long)puVar4 + 0x2b4c) = extraout_XMM0_Db_x00872;
  *(undefined4 *)(puVar4 + 0x56a) = extraout_XMM0_Dc_x00872;
  *(undefined4 *)((long)puVar4 + 0x2b54) = extraout_XMM0_Dd_x00872;
  puVar4[-0x346] = 0x8fdb61;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fdb81;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x14cb) = extraout_XMM0_Da_x00873;
  *(undefined4 *)((long)puVar4 + 0xa65c) = extraout_XMM0_Db_x00873;
  *(undefined4 *)(puVar4 + 0x14cc) = extraout_XMM0_Dc_x00873;
  *(undefined4 *)((long)puVar4 + 0xa664) = extraout_XMM0_Dd_x00873;
  puVar4[-0x346] = 0x8fdb96;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x56d) = extraout_XMM0_Da_x00874;
  *(undefined4 *)((long)puVar4 + 0x2b6c) = extraout_XMM0_Db_x00874;
  *(undefined4 *)(puVar4 + 0x56e) = extraout_XMM0_Dc_x00874;
  *(undefined4 *)((long)puVar4 + 0x2b74) = extraout_XMM0_Dd_x00874;
  puVar4[-0x346] = 0x8fdbbb;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fdbcb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x14c9) = extraout_XMM0_Da_x00875;
  *(undefined4 *)((long)puVar4 + 0xa64c) = extraout_XMM0_Db_x00875;
  *(undefined4 *)(puVar4 + 0x14ca) = extraout_XMM0_Dc_x00875;
  *(undefined4 *)((long)puVar4 + 0xa654) = extraout_XMM0_Dd_x00875;
  puVar4[-0x346] = 0x8fdbeb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x14d8];
  *puVar1 = extraout_XMM0_Da_x00876;
  puVar1[1] = extraout_XMM0_Db_x00876;
  puVar1[2] = extraout_XMM0_Dc_x00876;
  puVar1[3] = extraout_XMM0_Dd_x00876;
  puVar4[-0x346] = 0x8fdc0b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x14d0];
  *puVar1 = extraout_XMM0_Da_x00877;
  puVar1[1] = extraout_XMM0_Db_x00877;
  puVar1[2] = extraout_XMM0_Dc_x00877;
  puVar1[3] = extraout_XMM0_Dd_x00877;
  puVar4[0x56f] = puVar4[0x1def];
  puVar4[0x570] = puVar4[0x1df0];
  puVar4[0x571] = puVar4[0x1dfd];
  puVar4[0x572] = puVar4[0x1dfe];
  puVar4[0x573] = puVar4[0x1dfb];
  puVar4[0x574] = puVar4[0x1dfc];
  puVar4[0x575] = puVar4[0x1df7];
  puVar4[0x576] = puVar4[0x1df8];
  puVar4[0x577] = puVar4[0x1df5];
  puVar4[0x578] = puVar4[0x1df6];
  puVar4[0x579] = puVar4[0x1df3];
  puVar4[0x57a] = puVar4[0x1df4];
  puVar4[-0x346] = 0x8fdc80;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x14c7] = puVar4[0x56f];
  puVar4[0x14c8] = puVar4[0x570];
  puVar4[0x14c5] = puVar4[0x571];
  puVar4[0x14c6] = puVar4[0x572];
  puVar4[0x14c3] = puVar4[0x573];
  puVar4[0x14c4] = puVar4[0x574];
  puVar4[0x14c2] = puVar4[0xcd4];
  puVar4[0x14bf] = puVar4[0x575];
  puVar4[0x14c0] = puVar4[0x576];
  puVar4[0x14bd] = puVar4[0x577];
  puVar4[0x14be] = puVar4[0x578];
  puVar4[0x14bb] = puVar4[0x579];
  puVar4[0x14bc] = puVar4[0x57a];
  puVar4[0x14ba] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x14b7) = extraout_XMM0_Da_x00878;
  *(undefined4 *)((long)puVar4 + 0xa5bc) = extraout_XMM0_Db_x00878;
  *(undefined4 *)(puVar4 + 0x14b8) = extraout_XMM0_Dc_x00878;
  *(undefined4 *)((long)puVar4 + 0xa5c4) = extraout_XMM0_Dd_x00878;
  uVar2 = ((undefined8 *)puVar4[0x14ba])[1];
  puVar4[0x57d] = *(undefined8 *)puVar4[0x14ba];
  puVar4[0x57e] = uVar2;
  puVar4[-0x346] = 0x8fdd28;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x57b) = extraout_XMM0_Da_x00879;
  *(undefined4 *)((long)puVar4 + 0x2bdc) = extraout_XMM0_Db_x00879;
  *(undefined4 *)(puVar4 + 0x57c) = extraout_XMM0_Dc_x00879;
  *(undefined4 *)((long)puVar4 + 0x2be4) = extraout_XMM0_Dd_x00879;
  puVar4[-0x346] = 0x8fdd4d;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fdd6d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x14b5) = extraout_XMM0_Da_x00880;
  *(undefined4 *)((long)puVar4 + 0xa5ac) = extraout_XMM0_Db_x00880;
  *(undefined4 *)(puVar4 + 0x14b6) = extraout_XMM0_Dc_x00880;
  *(undefined4 *)((long)puVar4 + 0xa5b4) = extraout_XMM0_Dd_x00880;
  puVar4[-0x346] = 0x8fdd82;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x57f) = extraout_XMM0_Da_x00881;
  *(undefined4 *)((long)puVar4 + 0x2bfc) = extraout_XMM0_Db_x00881;
  *(undefined4 *)(puVar4 + 0x580) = extraout_XMM0_Dc_x00881;
  *(undefined4 *)((long)puVar4 + 0x2c04) = extraout_XMM0_Dd_x00881;
  puVar4[-0x346] = 0x8fdda7;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fddb7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x14b3) = extraout_XMM0_Da_x00882;
  *(undefined4 *)((long)puVar4 + 0xa59c) = extraout_XMM0_Db_x00882;
  *(undefined4 *)(puVar4 + 0x14b4) = extraout_XMM0_Dc_x00882;
  *(undefined4 *)((long)puVar4 + 0xa5a4) = extraout_XMM0_Dd_x00882;
  puVar4[-0x346] = 0x8fddd7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x14c2];
  *puVar1 = extraout_XMM0_Da_x00883;
  puVar1[1] = extraout_XMM0_Db_x00883;
  puVar1[2] = extraout_XMM0_Dc_x00883;
  puVar1[3] = extraout_XMM0_Dd_x00883;
  puVar4[-0x346] = 0x8fddf7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x14ba];
  *puVar1 = extraout_XMM0_Da_x00884;
  puVar1[1] = extraout_XMM0_Db_x00884;
  puVar1[2] = extraout_XMM0_Dc_x00884;
  puVar1[3] = extraout_XMM0_Dd_x00884;
  puVar4[0x581] = puVar4[0x1df1];
  puVar4[0x582] = puVar4[0x1df2];
  puVar4[0x583] = puVar4[0x1def];
  puVar4[0x584] = puVar4[0x1df0];
  puVar4[0x585] = puVar4[0x1dfd];
  puVar4[0x586] = puVar4[0x1dfe];
  puVar4[0x587] = puVar4[0x1df9];
  puVar4[0x588] = puVar4[0x1dfa];
  puVar4[0x589] = puVar4[0x1df7];
  puVar4[0x58a] = puVar4[0x1df8];
  puVar4[0x58b] = puVar4[0x1df5];
  puVar4[0x58c] = puVar4[0x1df6];
  puVar4[-0x346] = 0x8fde6c;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x14b1] = puVar4[0x581];
  puVar4[0x14b2] = puVar4[0x582];
  puVar4[0x14af] = puVar4[0x583];
  puVar4[0x14b0] = puVar4[0x584];
  puVar4[0x14ad] = puVar4[0x585];
  puVar4[0x14ae] = puVar4[0x586];
  puVar4[0x14ac] = puVar4[0xcf4];
  puVar4[0x14a9] = puVar4[0x587];
  puVar4[0x14aa] = puVar4[0x588];
  puVar4[0x14a7] = puVar4[0x589];
  puVar4[0x14a8] = puVar4[0x58a];
  puVar4[0x14a5] = puVar4[0x58b];
  puVar4[0x14a6] = puVar4[0x58c];
  puVar4[0x14a4] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x14a1) = extraout_XMM0_Da_x00885;
  *(undefined4 *)((long)puVar4 + 0xa50c) = extraout_XMM0_Db_x00885;
  *(undefined4 *)(puVar4 + 0x14a2) = extraout_XMM0_Dc_x00885;
  *(undefined4 *)((long)puVar4 + 0xa514) = extraout_XMM0_Dd_x00885;
  uVar2 = ((undefined8 *)puVar4[0x14a4])[1];
  puVar4[0x58f] = *(undefined8 *)puVar4[0x14a4];
  puVar4[0x590] = uVar2;
  puVar4[-0x346] = 0x8fdf14;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x58d) = extraout_XMM0_Da_x00886;
  *(undefined4 *)((long)puVar4 + 0x2c6c) = extraout_XMM0_Db_x00886;
  *(undefined4 *)(puVar4 + 0x58e) = extraout_XMM0_Dc_x00886;
  *(undefined4 *)((long)puVar4 + 0x2c74) = extraout_XMM0_Dd_x00886;
  puVar4[-0x346] = 0x8fdf39;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fdf59;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x149f) = extraout_XMM0_Da_x00887;
  *(undefined4 *)((long)puVar4 + 0xa4fc) = extraout_XMM0_Db_x00887;
  *(undefined4 *)(puVar4 + 0x14a0) = extraout_XMM0_Dc_x00887;
  *(undefined4 *)((long)puVar4 + 0xa504) = extraout_XMM0_Dd_x00887;
  puVar4[-0x346] = 0x8fdf6e;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x591) = extraout_XMM0_Da_x00888;
  *(undefined4 *)((long)puVar4 + 0x2c8c) = extraout_XMM0_Db_x00888;
  *(undefined4 *)(puVar4 + 0x592) = extraout_XMM0_Dc_x00888;
  *(undefined4 *)((long)puVar4 + 0x2c94) = extraout_XMM0_Dd_x00888;
  puVar4[-0x346] = 0x8fdf93;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fdfa3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x149d) = extraout_XMM0_Da_x00889;
  *(undefined4 *)((long)puVar4 + 0xa4ec) = extraout_XMM0_Db_x00889;
  *(undefined4 *)(puVar4 + 0x149e) = extraout_XMM0_Dc_x00889;
  *(undefined4 *)((long)puVar4 + 0xa4f4) = extraout_XMM0_Dd_x00889;
  puVar4[-0x346] = 0x8fdfc3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x14ac];
  *puVar1 = extraout_XMM0_Da_x00890;
  puVar1[1] = extraout_XMM0_Db_x00890;
  puVar1[2] = extraout_XMM0_Dc_x00890;
  puVar1[3] = extraout_XMM0_Dd_x00890;
  puVar4[-0x346] = 0x8fdfe3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x14a4];
  *puVar1 = extraout_XMM0_Da_x00891;
  puVar1[1] = extraout_XMM0_Db_x00891;
  puVar1[2] = extraout_XMM0_Dc_x00891;
  puVar1[3] = extraout_XMM0_Dd_x00891;
  puVar4[0x593] = puVar4[0x1df3];
  puVar4[0x594] = puVar4[0x1df4];
  puVar4[0x595] = puVar4[0x1df1];
  puVar4[0x596] = puVar4[0x1df2];
  puVar4[0x597] = puVar4[0x1def];
  puVar4[0x598] = puVar4[0x1df0];
  puVar4[0x599] = puVar4[0x1dfb];
  puVar4[0x59a] = puVar4[0x1dfc];
  puVar4[0x59b] = puVar4[0x1df9];
  puVar4[0x59c] = puVar4[0x1dfa];
  puVar4[0x59d] = puVar4[0x1df7];
  puVar4[0x59e] = puVar4[0x1df8];
  puVar4[-0x346] = 0x8fe058;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x149b] = puVar4[0x593];
  puVar4[0x149c] = puVar4[0x594];
  puVar4[0x1499] = puVar4[0x595];
  puVar4[0x149a] = puVar4[0x596];
  puVar4[0x1497] = puVar4[0x597];
  puVar4[0x1498] = puVar4[0x598];
  puVar4[0x1496] = puVar4[0xd14];
  puVar4[0x1493] = puVar4[0x599];
  puVar4[0x1494] = puVar4[0x59a];
  puVar4[0x1491] = puVar4[0x59b];
  puVar4[0x1492] = puVar4[0x59c];
  puVar4[0x148f] = puVar4[0x59d];
  puVar4[0x1490] = puVar4[0x59e];
  puVar4[0x148e] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x148b) = extraout_XMM0_Da_x00892;
  *(undefined4 *)((long)puVar4 + 0xa45c) = extraout_XMM0_Db_x00892;
  *(undefined4 *)(puVar4 + 0x148c) = extraout_XMM0_Dc_x00892;
  *(undefined4 *)((long)puVar4 + 0xa464) = extraout_XMM0_Dd_x00892;
  uVar2 = ((undefined8 *)puVar4[0x148e])[1];
  puVar4[0x5a1] = *(undefined8 *)puVar4[0x148e];
  puVar4[0x5a2] = uVar2;
  puVar4[-0x346] = 0x8fe100;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x59f) = extraout_XMM0_Da_x00893;
  *(undefined4 *)((long)puVar4 + 0x2cfc) = extraout_XMM0_Db_x00893;
  *(undefined4 *)(puVar4 + 0x5a0) = extraout_XMM0_Dc_x00893;
  *(undefined4 *)((long)puVar4 + 0x2d04) = extraout_XMM0_Dd_x00893;
  puVar4[-0x346] = 0x8fe125;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fe145;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1489) = extraout_XMM0_Da_x00894;
  *(undefined4 *)((long)puVar4 + 0xa44c) = extraout_XMM0_Db_x00894;
  *(undefined4 *)(puVar4 + 0x148a) = extraout_XMM0_Dc_x00894;
  *(undefined4 *)((long)puVar4 + 0xa454) = extraout_XMM0_Dd_x00894;
  puVar4[-0x346] = 0x8fe15a;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x5a3) = extraout_XMM0_Da_x00895;
  *(undefined4 *)((long)puVar4 + 0x2d1c) = extraout_XMM0_Db_x00895;
  *(undefined4 *)(puVar4 + 0x5a4) = extraout_XMM0_Dc_x00895;
  *(undefined4 *)((long)puVar4 + 0x2d24) = extraout_XMM0_Dd_x00895;
  puVar4[-0x346] = 0x8fe17f;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fe18f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1487) = extraout_XMM0_Da_x00896;
  *(undefined4 *)((long)puVar4 + 0xa43c) = extraout_XMM0_Db_x00896;
  *(undefined4 *)(puVar4 + 0x1488) = extraout_XMM0_Dc_x00896;
  *(undefined4 *)((long)puVar4 + 0xa444) = extraout_XMM0_Dd_x00896;
  puVar4[-0x346] = 0x8fe1af;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1496];
  *puVar1 = extraout_XMM0_Da_x00897;
  puVar1[1] = extraout_XMM0_Db_x00897;
  puVar1[2] = extraout_XMM0_Dc_x00897;
  puVar1[3] = extraout_XMM0_Dd_x00897;
  puVar4[-0x346] = 0x8fe1cf;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x148e];
  *puVar1 = extraout_XMM0_Da_x00898;
  puVar1[1] = extraout_XMM0_Db_x00898;
  puVar1[2] = extraout_XMM0_Dc_x00898;
  puVar1[3] = extraout_XMM0_Dd_x00898;
  puVar4[0x5a5] = puVar4[0x1df5];
  puVar4[0x5a6] = puVar4[0x1df6];
  puVar4[0x5a7] = puVar4[0x1df3];
  puVar4[0x5a8] = puVar4[0x1df4];
  puVar4[0x5a9] = puVar4[0x1df1];
  puVar4[0x5aa] = puVar4[0x1df2];
  puVar4[0x5ab] = puVar4[0x1dfd];
  puVar4[0x5ac] = puVar4[0x1dfe];
  puVar4[0x5ad] = puVar4[0x1dfb];
  puVar4[0x5ae] = puVar4[0x1dfc];
  puVar4[0x5af] = puVar4[0x1df9];
  puVar4[0x5b0] = puVar4[0x1dfa];
  puVar4[-0x346] = 0x8fe244;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1485] = puVar4[0x5a5];
  puVar4[0x1486] = puVar4[0x5a6];
  puVar4[0x1483] = puVar4[0x5a7];
  puVar4[0x1484] = puVar4[0x5a8];
  puVar4[0x1481] = puVar4[0x5a9];
  puVar4[0x1482] = puVar4[0x5aa];
  puVar4[0x1480] = puVar4[0xcae];
  puVar4[0x147d] = puVar4[0x5ab];
  puVar4[0x147e] = puVar4[0x5ac];
  puVar4[0x147b] = puVar4[0x5ad];
  puVar4[0x147c] = puVar4[0x5ae];
  puVar4[0x1479] = puVar4[0x5af];
  puVar4[0x147a] = puVar4[0x5b0];
  puVar4[0x1478] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x1475) = extraout_XMM0_Da_x00899;
  *(undefined4 *)((long)puVar4 + 0xa3ac) = extraout_XMM0_Db_x00899;
  *(undefined4 *)(puVar4 + 0x1476) = extraout_XMM0_Dc_x00899;
  *(undefined4 *)((long)puVar4 + 0xa3b4) = extraout_XMM0_Dd_x00899;
  uVar2 = ((undefined8 *)puVar4[0x1478])[1];
  puVar4[0x5b3] = *(undefined8 *)puVar4[0x1478];
  puVar4[0x5b4] = uVar2;
  puVar4[-0x346] = 0x8fe2ec;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x5b1) = extraout_XMM0_Da_x00900;
  *(undefined4 *)((long)puVar4 + 0x2d8c) = extraout_XMM0_Db_x00900;
  *(undefined4 *)(puVar4 + 0x5b2) = extraout_XMM0_Dc_x00900;
  *(undefined4 *)((long)puVar4 + 0x2d94) = extraout_XMM0_Dd_x00900;
  puVar4[-0x346] = 0x8fe311;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fe331;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1473) = extraout_XMM0_Da_x00901;
  *(undefined4 *)((long)puVar4 + 0xa39c) = extraout_XMM0_Db_x00901;
  *(undefined4 *)(puVar4 + 0x1474) = extraout_XMM0_Dc_x00901;
  *(undefined4 *)((long)puVar4 + 0xa3a4) = extraout_XMM0_Dd_x00901;
  puVar4[-0x346] = 0x8fe346;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x5b5) = extraout_XMM0_Da_x00902;
  *(undefined4 *)((long)puVar4 + 0x2dac) = extraout_XMM0_Db_x00902;
  *(undefined4 *)(puVar4 + 0x5b6) = extraout_XMM0_Dc_x00902;
  *(undefined4 *)((long)puVar4 + 0x2db4) = extraout_XMM0_Dd_x00902;
  puVar4[-0x346] = 0x8fe36b;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fe37b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1471) = extraout_XMM0_Da_x00903;
  *(undefined4 *)((long)puVar4 + 0xa38c) = extraout_XMM0_Db_x00903;
  *(undefined4 *)(puVar4 + 0x1472) = extraout_XMM0_Dc_x00903;
  *(undefined4 *)((long)puVar4 + 0xa394) = extraout_XMM0_Dd_x00903;
  puVar4[-0x346] = 0x8fe39b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1480];
  *puVar1 = extraout_XMM0_Da_x00904;
  puVar1[1] = extraout_XMM0_Db_x00904;
  puVar1[2] = extraout_XMM0_Dc_x00904;
  puVar1[3] = extraout_XMM0_Dd_x00904;
  puVar4[-0x346] = 0x8fe3bb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1478];
  *puVar1 = extraout_XMM0_Da_x00905;
  puVar1[1] = extraout_XMM0_Db_x00905;
  puVar1[2] = extraout_XMM0_Dc_x00905;
  puVar1[3] = extraout_XMM0_Dd_x00905;
  puVar4[0x5b7] = puVar4[0x1df7];
  puVar4[0x5b8] = puVar4[0x1df8];
  puVar4[0x5b9] = puVar4[0x1df5];
  puVar4[0x5ba] = puVar4[0x1df6];
  puVar4[0x5bb] = puVar4[0x1df3];
  puVar4[0x5bc] = puVar4[0x1df4];
  puVar4[0x5bd] = puVar4[0x1def];
  puVar4[0x5be] = puVar4[0x1df0];
  puVar4[0x5bf] = puVar4[0x1dfd];
  puVar4[0x5c0] = puVar4[0x1dfe];
  puVar4[0x5c1] = puVar4[0x1dfb];
  puVar4[0x5c2] = puVar4[0x1dfc];
  puVar4[-0x346] = 0x8fe430;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x146f] = puVar4[0x5b7];
  puVar4[0x1470] = puVar4[0x5b8];
  puVar4[0x146d] = puVar4[0x5b9];
  puVar4[0x146e] = puVar4[0x5ba];
  puVar4[0x146b] = puVar4[0x5bb];
  puVar4[0x146c] = puVar4[0x5bc];
  puVar4[0x146a] = puVar4[0xccc];
  puVar4[0x1467] = puVar4[0x5bd];
  puVar4[0x1468] = puVar4[0x5be];
  puVar4[0x1465] = puVar4[0x5bf];
  puVar4[0x1466] = puVar4[0x5c0];
  puVar4[0x1463] = puVar4[0x5c1];
  puVar4[0x1464] = puVar4[0x5c2];
  puVar4[0x1462] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x145f) = extraout_XMM0_Da_x00906;
  *(undefined4 *)((long)puVar4 + 0xa2fc) = extraout_XMM0_Db_x00906;
  *(undefined4 *)(puVar4 + 0x1460) = extraout_XMM0_Dc_x00906;
  *(undefined4 *)((long)puVar4 + 0xa304) = extraout_XMM0_Dd_x00906;
  uVar2 = ((undefined8 *)puVar4[0x1462])[1];
  puVar4[0x5c5] = *(undefined8 *)puVar4[0x1462];
  puVar4[0x5c6] = uVar2;
  puVar4[-0x346] = 0x8fe4d8;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x5c3) = extraout_XMM0_Da_x00907;
  *(undefined4 *)((long)puVar4 + 0x2e1c) = extraout_XMM0_Db_x00907;
  *(undefined4 *)(puVar4 + 0x5c4) = extraout_XMM0_Dc_x00907;
  *(undefined4 *)((long)puVar4 + 0x2e24) = extraout_XMM0_Dd_x00907;
  puVar4[-0x346] = 0x8fe4fd;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fe51d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x145d) = extraout_XMM0_Da_x00908;
  *(undefined4 *)((long)puVar4 + 0xa2ec) = extraout_XMM0_Db_x00908;
  *(undefined4 *)(puVar4 + 0x145e) = extraout_XMM0_Dc_x00908;
  *(undefined4 *)((long)puVar4 + 0xa2f4) = extraout_XMM0_Dd_x00908;
  puVar4[-0x346] = 0x8fe532;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x5c7) = extraout_XMM0_Da_x00909;
  *(undefined4 *)((long)puVar4 + 0x2e3c) = extraout_XMM0_Db_x00909;
  *(undefined4 *)(puVar4 + 0x5c8) = extraout_XMM0_Dc_x00909;
  *(undefined4 *)((long)puVar4 + 0x2e44) = extraout_XMM0_Dd_x00909;
  puVar4[-0x346] = 0x8fe557;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fe567;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x145b) = extraout_XMM0_Da_x00910;
  *(undefined4 *)((long)puVar4 + 0xa2dc) = extraout_XMM0_Db_x00910;
  *(undefined4 *)(puVar4 + 0x145c) = extraout_XMM0_Dc_x00910;
  *(undefined4 *)((long)puVar4 + 0xa2e4) = extraout_XMM0_Dd_x00910;
  puVar4[-0x346] = 0x8fe587;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x146a];
  *puVar1 = extraout_XMM0_Da_x00911;
  puVar1[1] = extraout_XMM0_Db_x00911;
  puVar1[2] = extraout_XMM0_Dc_x00911;
  puVar1[3] = extraout_XMM0_Dd_x00911;
  puVar4[-0x346] = 0x8fe5a7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1462];
  *puVar1 = extraout_XMM0_Da_x00912;
  puVar1[1] = extraout_XMM0_Db_x00912;
  puVar1[2] = extraout_XMM0_Dc_x00912;
  puVar1[3] = extraout_XMM0_Dd_x00912;
  puVar4[0x5c9] = puVar4[0x1df9];
  puVar4[0x5ca] = puVar4[0x1dfa];
  puVar4[0x5cb] = puVar4[0x1df7];
  puVar4[0x5cc] = puVar4[0x1df8];
  puVar4[0x5cd] = puVar4[0x1df5];
  puVar4[0x5ce] = puVar4[0x1df6];
  puVar4[0x5cf] = puVar4[0x1df1];
  puVar4[0x5d0] = puVar4[0x1df2];
  puVar4[0x5d1] = puVar4[0x1def];
  puVar4[0x5d2] = puVar4[0x1df0];
  puVar4[0x5d3] = puVar4[0x1dfd];
  puVar4[0x5d4] = puVar4[0x1dfe];
  puVar4[-0x346] = 0x8fe61c;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1459] = puVar4[0x5c9];
  puVar4[0x145a] = puVar4[0x5ca];
  puVar4[0x1457] = puVar4[0x5cb];
  puVar4[0x1458] = puVar4[0x5cc];
  puVar4[0x1455] = puVar4[0x5cd];
  puVar4[0x1456] = puVar4[0x5ce];
  puVar4[0x1454] = puVar4[0xcec];
  puVar4[0x1451] = puVar4[0x5cf];
  puVar4[0x1452] = puVar4[0x5d0];
  puVar4[0x144f] = puVar4[0x5d1];
  puVar4[0x1450] = puVar4[0x5d2];
  puVar4[0x144d] = puVar4[0x5d3];
  puVar4[0x144e] = puVar4[0x5d4];
  puVar4[0x144c] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x1449) = extraout_XMM0_Da_x00913;
  *(undefined4 *)((long)puVar4 + 0xa24c) = extraout_XMM0_Db_x00913;
  *(undefined4 *)(puVar4 + 0x144a) = extraout_XMM0_Dc_x00913;
  *(undefined4 *)((long)puVar4 + 0xa254) = extraout_XMM0_Dd_x00913;
  uVar2 = ((undefined8 *)puVar4[0x144c])[1];
  puVar4[0x5d7] = *(undefined8 *)puVar4[0x144c];
  puVar4[0x5d8] = uVar2;
  puVar4[-0x346] = 0x8fe6c4;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x5d5) = extraout_XMM0_Da_x00914;
  *(undefined4 *)((long)puVar4 + 0x2eac) = extraout_XMM0_Db_x00914;
  *(undefined4 *)(puVar4 + 0x5d6) = extraout_XMM0_Dc_x00914;
  *(undefined4 *)((long)puVar4 + 0x2eb4) = extraout_XMM0_Dd_x00914;
  puVar4[-0x346] = 0x8fe6e9;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fe709;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1447) = extraout_XMM0_Da_x00915;
  *(undefined4 *)((long)puVar4 + 0xa23c) = extraout_XMM0_Db_x00915;
  *(undefined4 *)(puVar4 + 0x1448) = extraout_XMM0_Dc_x00915;
  *(undefined4 *)((long)puVar4 + 0xa244) = extraout_XMM0_Dd_x00915;
  puVar4[-0x346] = 0x8fe71e;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x5d9) = extraout_XMM0_Da_x00916;
  *(undefined4 *)((long)puVar4 + 0x2ecc) = extraout_XMM0_Db_x00916;
  *(undefined4 *)(puVar4 + 0x5da) = extraout_XMM0_Dc_x00916;
  *(undefined4 *)((long)puVar4 + 0x2ed4) = extraout_XMM0_Dd_x00916;
  puVar4[-0x346] = 0x8fe743;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fe753;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1445) = extraout_XMM0_Da_x00917;
  *(undefined4 *)((long)puVar4 + 0xa22c) = extraout_XMM0_Db_x00917;
  *(undefined4 *)(puVar4 + 0x1446) = extraout_XMM0_Dc_x00917;
  *(undefined4 *)((long)puVar4 + 0xa234) = extraout_XMM0_Dd_x00917;
  puVar4[-0x346] = 0x8fe773;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1454];
  *puVar1 = extraout_XMM0_Da_x00918;
  puVar1[1] = extraout_XMM0_Db_x00918;
  puVar1[2] = extraout_XMM0_Dc_x00918;
  puVar1[3] = extraout_XMM0_Dd_x00918;
  puVar4[-0x346] = 0x8fe793;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x144c];
  *puVar1 = extraout_XMM0_Da_x00919;
  puVar1[1] = extraout_XMM0_Db_x00919;
  puVar1[2] = extraout_XMM0_Dc_x00919;
  puVar1[3] = extraout_XMM0_Dd_x00919;
  puVar4[0x5db] = puVar4[0x1dfb];
  puVar4[0x5dc] = puVar4[0x1dfc];
  puVar4[0x5dd] = puVar4[0x1df9];
  puVar4[0x5de] = puVar4[0x1dfa];
  puVar4[0x5df] = puVar4[0x1df7];
  puVar4[0x5e0] = puVar4[0x1df8];
  puVar4[0x5e1] = puVar4[0x1df3];
  puVar4[0x5e2] = puVar4[0x1df4];
  puVar4[0x5e3] = puVar4[0x1df1];
  puVar4[0x5e4] = puVar4[0x1df2];
  puVar4[0x5e5] = puVar4[0x1def];
  puVar4[0x5e6] = puVar4[0x1df0];
  puVar4[-0x346] = 0x8fe808;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1443] = puVar4[0x5db];
  puVar4[0x1444] = puVar4[0x5dc];
  puVar4[0x1441] = puVar4[0x5dd];
  puVar4[0x1442] = puVar4[0x5de];
  puVar4[0x143f] = puVar4[0x5df];
  puVar4[0x1440] = puVar4[0x5e0];
  puVar4[0x143e] = puVar4[0xd0c];
  puVar4[0x143b] = puVar4[0x5e1];
  puVar4[0x143c] = puVar4[0x5e2];
  puVar4[0x1439] = puVar4[0x5e3];
  puVar4[0x143a] = puVar4[0x5e4];
  puVar4[0x1437] = puVar4[0x5e5];
  puVar4[0x1438] = puVar4[0x5e6];
  puVar4[0x1436] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x1433) = extraout_XMM0_Da_x00920;
  *(undefined4 *)((long)puVar4 + 0xa19c) = extraout_XMM0_Db_x00920;
  *(undefined4 *)(puVar4 + 0x1434) = extraout_XMM0_Dc_x00920;
  *(undefined4 *)((long)puVar4 + 0xa1a4) = extraout_XMM0_Dd_x00920;
  uVar2 = ((undefined8 *)puVar4[0x1436])[1];
  puVar4[0x5e9] = *(undefined8 *)puVar4[0x1436];
  puVar4[0x5ea] = uVar2;
  puVar4[-0x346] = 0x8fe8b0;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x5e7) = extraout_XMM0_Da_x00921;
  *(undefined4 *)((long)puVar4 + 0x2f3c) = extraout_XMM0_Db_x00921;
  *(undefined4 *)(puVar4 + 0x5e8) = extraout_XMM0_Dc_x00921;
  *(undefined4 *)((long)puVar4 + 0x2f44) = extraout_XMM0_Dd_x00921;
  puVar4[-0x346] = 0x8fe8d5;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fe8f5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1431) = extraout_XMM0_Da_x00922;
  *(undefined4 *)((long)puVar4 + 0xa18c) = extraout_XMM0_Db_x00922;
  *(undefined4 *)(puVar4 + 0x1432) = extraout_XMM0_Dc_x00922;
  *(undefined4 *)((long)puVar4 + 0xa194) = extraout_XMM0_Dd_x00922;
  puVar4[-0x346] = 0x8fe90a;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x5eb) = extraout_XMM0_Da_x00923;
  *(undefined4 *)((long)puVar4 + 0x2f5c) = extraout_XMM0_Db_x00923;
  *(undefined4 *)(puVar4 + 0x5ec) = extraout_XMM0_Dc_x00923;
  *(undefined4 *)((long)puVar4 + 0x2f64) = extraout_XMM0_Dd_x00923;
  puVar4[-0x346] = 0x8fe92f;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fe93f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x142f) = extraout_XMM0_Da_x00924;
  *(undefined4 *)((long)puVar4 + 0xa17c) = extraout_XMM0_Db_x00924;
  *(undefined4 *)(puVar4 + 0x1430) = extraout_XMM0_Dc_x00924;
  *(undefined4 *)((long)puVar4 + 0xa184) = extraout_XMM0_Dd_x00924;
  puVar4[-0x346] = 0x8fe95f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x143e];
  *puVar1 = extraout_XMM0_Da_x00925;
  puVar1[1] = extraout_XMM0_Db_x00925;
  puVar1[2] = extraout_XMM0_Dc_x00925;
  puVar1[3] = extraout_XMM0_Dd_x00925;
  puVar4[-0x346] = 0x8fe97f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1436];
  *puVar1 = extraout_XMM0_Da_x00926;
  puVar1[1] = extraout_XMM0_Db_x00926;
  puVar1[2] = extraout_XMM0_Dc_x00926;
  puVar1[3] = extraout_XMM0_Dd_x00926;
  puVar4[0x5ed] = puVar4[0x1dfd];
  puVar4[0x5ee] = puVar4[0x1dfe];
  puVar4[0x5ef] = puVar4[0x1dfb];
  puVar4[0x5f0] = puVar4[0x1dfc];
  puVar4[0x5f1] = puVar4[0x1df9];
  puVar4[0x5f2] = puVar4[0x1dfa];
  puVar4[0x5f3] = puVar4[0x1df5];
  puVar4[0x5f4] = puVar4[0x1df6];
  puVar4[0x5f5] = puVar4[0x1df3];
  puVar4[0x5f6] = puVar4[0x1df4];
  puVar4[0x5f7] = puVar4[0x1df1];
  puVar4[0x5f8] = puVar4[0x1df2];
  puVar4[-0x346] = 0x8fe9f4;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x142d] = puVar4[0x5ed];
  puVar4[0x142e] = puVar4[0x5ee];
  puVar4[0x142b] = puVar4[0x5ef];
  puVar4[0x142c] = puVar4[0x5f0];
  puVar4[0x1429] = puVar4[0x5f1];
  puVar4[0x142a] = puVar4[0x5f2];
  puVar4[0x1428] = puVar4[0xcb6];
  puVar4[0x1425] = puVar4[0x5f3];
  puVar4[0x1426] = puVar4[0x5f4];
  puVar4[0x1423] = puVar4[0x5f5];
  puVar4[0x1424] = puVar4[0x5f6];
  puVar4[0x1421] = puVar4[0x5f7];
  puVar4[0x1422] = puVar4[0x5f8];
  puVar4[0x1420] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x141d) = extraout_XMM0_Da_x00927;
  *(undefined4 *)((long)puVar4 + 0xa0ec) = extraout_XMM0_Db_x00927;
  *(undefined4 *)(puVar4 + 0x141e) = extraout_XMM0_Dc_x00927;
  *(undefined4 *)((long)puVar4 + 0xa0f4) = extraout_XMM0_Dd_x00927;
  uVar2 = ((undefined8 *)puVar4[0x1420])[1];
  puVar4[0x5fb] = *(undefined8 *)puVar4[0x1420];
  puVar4[0x5fc] = uVar2;
  puVar4[-0x346] = 0x8fea9c;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x5f9) = extraout_XMM0_Da_x00928;
  *(undefined4 *)((long)puVar4 + 0x2fcc) = extraout_XMM0_Db_x00928;
  *(undefined4 *)(puVar4 + 0x5fa) = extraout_XMM0_Dc_x00928;
  *(undefined4 *)((long)puVar4 + 0x2fd4) = extraout_XMM0_Dd_x00928;
  puVar4[-0x346] = 0x8feac1;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8feae1;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x141b) = extraout_XMM0_Da_x00929;
  *(undefined4 *)((long)puVar4 + 0xa0dc) = extraout_XMM0_Db_x00929;
  *(undefined4 *)(puVar4 + 0x141c) = extraout_XMM0_Dc_x00929;
  *(undefined4 *)((long)puVar4 + 0xa0e4) = extraout_XMM0_Dd_x00929;
  puVar4[-0x346] = 0x8feaf6;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x5fd) = extraout_XMM0_Da_x00930;
  *(undefined4 *)((long)puVar4 + 0x2fec) = extraout_XMM0_Db_x00930;
  *(undefined4 *)(puVar4 + 0x5fe) = extraout_XMM0_Dc_x00930;
  *(undefined4 *)((long)puVar4 + 0x2ff4) = extraout_XMM0_Dd_x00930;
  puVar4[-0x346] = 0x8feb1b;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8feb2b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1419) = extraout_XMM0_Da_x00931;
  *(undefined4 *)((long)puVar4 + 0xa0cc) = extraout_XMM0_Db_x00931;
  *(undefined4 *)(puVar4 + 0x141a) = extraout_XMM0_Dc_x00931;
  *(undefined4 *)((long)puVar4 + 0xa0d4) = extraout_XMM0_Dd_x00931;
  puVar4[-0x346] = 0x8feb4b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1428];
  *puVar1 = extraout_XMM0_Da_x00932;
  puVar1[1] = extraout_XMM0_Db_x00932;
  puVar1[2] = extraout_XMM0_Dc_x00932;
  puVar1[3] = extraout_XMM0_Dd_x00932;
  puVar4[-0x346] = 0x8feb6b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1420];
  *puVar1 = extraout_XMM0_Da_x00933;
  puVar1[1] = extraout_XMM0_Db_x00933;
  puVar1[2] = extraout_XMM0_Dc_x00933;
  puVar1[3] = extraout_XMM0_Dd_x00933;
  puVar4[0x5ff] = puVar4[0x1def];
  puVar4[0x600] = puVar4[0x1df0];
  puVar4[0x601] = puVar4[0x1dfd];
  puVar4[0x602] = puVar4[0x1dfe];
  puVar4[0x603] = puVar4[0x1dfb];
  puVar4[0x604] = puVar4[0x1dfc];
  puVar4[0x605] = puVar4[0x1df7];
  puVar4[0x606] = puVar4[0x1df8];
  puVar4[0x607] = puVar4[0x1df5];
  puVar4[0x608] = puVar4[0x1df6];
  puVar4[0x609] = puVar4[0x1df3];
  puVar4[0x60a] = puVar4[0x1df4];
  puVar4[-0x346] = 0x8febe0;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1417] = puVar4[0x5ff];
  puVar4[0x1418] = puVar4[0x600];
  puVar4[0x1415] = puVar4[0x601];
  puVar4[0x1416] = puVar4[0x602];
  puVar4[0x1413] = puVar4[0x603];
  puVar4[0x1414] = puVar4[0x604];
  puVar4[0x1412] = puVar4[0xcd4];
  puVar4[0x140f] = puVar4[0x605];
  puVar4[0x1410] = puVar4[0x606];
  puVar4[0x140d] = puVar4[0x607];
  puVar4[0x140e] = puVar4[0x608];
  puVar4[0x140b] = puVar4[0x609];
  puVar4[0x140c] = puVar4[0x60a];
  puVar4[0x140a] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x1407) = extraout_XMM0_Da_x00934;
  *(undefined4 *)((long)puVar4 + 0xa03c) = extraout_XMM0_Db_x00934;
  *(undefined4 *)(puVar4 + 0x1408) = extraout_XMM0_Dc_x00934;
  *(undefined4 *)((long)puVar4 + 0xa044) = extraout_XMM0_Dd_x00934;
  uVar2 = ((undefined8 *)puVar4[0x140a])[1];
  puVar4[0x60d] = *(undefined8 *)puVar4[0x140a];
  puVar4[0x60e] = uVar2;
  puVar4[-0x346] = 0x8fec88;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x60b) = extraout_XMM0_Da_x00935;
  *(undefined4 *)((long)puVar4 + 0x305c) = extraout_XMM0_Db_x00935;
  *(undefined4 *)(puVar4 + 0x60c) = extraout_XMM0_Dc_x00935;
  *(undefined4 *)((long)puVar4 + 0x3064) = extraout_XMM0_Dd_x00935;
  puVar4[-0x346] = 0x8fecad;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8feccd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1405) = extraout_XMM0_Da_x00936;
  *(undefined4 *)((long)puVar4 + 0xa02c) = extraout_XMM0_Db_x00936;
  *(undefined4 *)(puVar4 + 0x1406) = extraout_XMM0_Dc_x00936;
  *(undefined4 *)((long)puVar4 + 0xa034) = extraout_XMM0_Dd_x00936;
  puVar4[-0x346] = 0x8fece2;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x60f) = extraout_XMM0_Da_x00937;
  *(undefined4 *)((long)puVar4 + 0x307c) = extraout_XMM0_Db_x00937;
  *(undefined4 *)(puVar4 + 0x610) = extraout_XMM0_Dc_x00937;
  *(undefined4 *)((long)puVar4 + 0x3084) = extraout_XMM0_Dd_x00937;
  puVar4[-0x346] = 0x8fed07;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fed17;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1403) = extraout_XMM0_Da_x00938;
  *(undefined4 *)((long)puVar4 + 0xa01c) = extraout_XMM0_Db_x00938;
  *(undefined4 *)(puVar4 + 0x1404) = extraout_XMM0_Dc_x00938;
  *(undefined4 *)((long)puVar4 + 0xa024) = extraout_XMM0_Dd_x00938;
  puVar4[-0x346] = 0x8fed37;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1412];
  *puVar1 = extraout_XMM0_Da_x00939;
  puVar1[1] = extraout_XMM0_Db_x00939;
  puVar1[2] = extraout_XMM0_Dc_x00939;
  puVar1[3] = extraout_XMM0_Dd_x00939;
  puVar4[-0x346] = 0x8fed57;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x140a];
  *puVar1 = extraout_XMM0_Da_x00940;
  puVar1[1] = extraout_XMM0_Db_x00940;
  puVar1[2] = extraout_XMM0_Dc_x00940;
  puVar1[3] = extraout_XMM0_Dd_x00940;
  puVar4[0x611] = puVar4[0x1df1];
  puVar4[0x612] = puVar4[0x1df2];
  puVar4[0x613] = puVar4[0x1def];
  puVar4[0x614] = puVar4[0x1df0];
  puVar4[0x615] = puVar4[0x1dfd];
  puVar4[0x616] = puVar4[0x1dfe];
  puVar4[0x617] = puVar4[0x1df9];
  puVar4[0x618] = puVar4[0x1dfa];
  puVar4[0x619] = puVar4[0x1df7];
  puVar4[0x61a] = puVar4[0x1df8];
  puVar4[0x61b] = puVar4[0x1df5];
  puVar4[0x61c] = puVar4[0x1df6];
  puVar4[-0x346] = 0x8fedcc;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1401] = puVar4[0x611];
  puVar4[0x1402] = puVar4[0x612];
  puVar4[0x13ff] = puVar4[0x613];
  puVar4[0x1400] = puVar4[0x614];
  puVar4[0x13fd] = puVar4[0x615];
  puVar4[0x13fe] = puVar4[0x616];
  puVar4[0x13fc] = puVar4[0xcf4];
  puVar4[0x13f9] = puVar4[0x617];
  puVar4[0x13fa] = puVar4[0x618];
  puVar4[0x13f7] = puVar4[0x619];
  puVar4[0x13f8] = puVar4[0x61a];
  puVar4[0x13f5] = puVar4[0x61b];
  puVar4[0x13f6] = puVar4[0x61c];
  puVar4[0x13f4] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x13f1) = extraout_XMM0_Da_x00941;
  *(undefined4 *)((long)puVar4 + 0x9f8c) = extraout_XMM0_Db_x00941;
  *(undefined4 *)(puVar4 + 0x13f2) = extraout_XMM0_Dc_x00941;
  *(undefined4 *)((long)puVar4 + 0x9f94) = extraout_XMM0_Dd_x00941;
  uVar2 = ((undefined8 *)puVar4[0x13f4])[1];
  puVar4[0x61f] = *(undefined8 *)puVar4[0x13f4];
  puVar4[0x620] = uVar2;
  puVar4[-0x346] = 0x8fee74;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x61d) = extraout_XMM0_Da_x00942;
  *(undefined4 *)((long)puVar4 + 0x30ec) = extraout_XMM0_Db_x00942;
  *(undefined4 *)(puVar4 + 0x61e) = extraout_XMM0_Dc_x00942;
  *(undefined4 *)((long)puVar4 + 0x30f4) = extraout_XMM0_Dd_x00942;
  puVar4[-0x346] = 0x8fee99;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8feeb9;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x13ef) = extraout_XMM0_Da_x00943;
  *(undefined4 *)((long)puVar4 + 0x9f7c) = extraout_XMM0_Db_x00943;
  *(undefined4 *)(puVar4 + 0x13f0) = extraout_XMM0_Dc_x00943;
  *(undefined4 *)((long)puVar4 + 0x9f84) = extraout_XMM0_Dd_x00943;
  puVar4[-0x346] = 0x8feece;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x621) = extraout_XMM0_Da_x00944;
  *(undefined4 *)((long)puVar4 + 0x310c) = extraout_XMM0_Db_x00944;
  *(undefined4 *)(puVar4 + 0x622) = extraout_XMM0_Dc_x00944;
  *(undefined4 *)((long)puVar4 + 0x3114) = extraout_XMM0_Dd_x00944;
  puVar4[-0x346] = 0x8feef3;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8fef03;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x13ed) = extraout_XMM0_Da_x00945;
  *(undefined4 *)((long)puVar4 + 0x9f6c) = extraout_XMM0_Db_x00945;
  *(undefined4 *)(puVar4 + 0x13ee) = extraout_XMM0_Dc_x00945;
  *(undefined4 *)((long)puVar4 + 0x9f74) = extraout_XMM0_Dd_x00945;
  puVar4[-0x346] = 0x8fef23;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x13fc];
  *puVar1 = extraout_XMM0_Da_x00946;
  puVar1[1] = extraout_XMM0_Db_x00946;
  puVar1[2] = extraout_XMM0_Dc_x00946;
  puVar1[3] = extraout_XMM0_Dd_x00946;
  puVar4[-0x346] = 0x8fef43;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x13f4];
  *puVar1 = extraout_XMM0_Da_x00947;
  puVar1[1] = extraout_XMM0_Db_x00947;
  puVar1[2] = extraout_XMM0_Dc_x00947;
  puVar1[3] = extraout_XMM0_Dd_x00947;
  puVar4[0x623] = puVar4[0x1df3];
  puVar4[0x624] = puVar4[0x1df4];
  puVar4[0x625] = puVar4[0x1df1];
  puVar4[0x626] = puVar4[0x1df2];
  puVar4[0x627] = puVar4[0x1def];
  puVar4[0x628] = puVar4[0x1df0];
  puVar4[0x629] = puVar4[0x1dfb];
  puVar4[0x62a] = puVar4[0x1dfc];
  puVar4[0x62b] = puVar4[0x1df9];
  puVar4[0x62c] = puVar4[0x1dfa];
  puVar4[0x62d] = puVar4[0x1df7];
  puVar4[0x62e] = puVar4[0x1df8];
  puVar4[-0x346] = 0x8fefb8;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x13eb] = puVar4[0x623];
  puVar4[0x13ec] = puVar4[0x624];
  puVar4[0x13e9] = puVar4[0x625];
  puVar4[0x13ea] = puVar4[0x626];
  puVar4[0x13e7] = puVar4[0x627];
  puVar4[0x13e8] = puVar4[0x628];
  puVar4[0x13e6] = puVar4[0xd14];
  puVar4[0x13e3] = puVar4[0x629];
  puVar4[0x13e4] = puVar4[0x62a];
  puVar4[0x13e1] = puVar4[0x62b];
  puVar4[0x13e2] = puVar4[0x62c];
  puVar4[0x13df] = puVar4[0x62d];
  puVar4[0x13e0] = puVar4[0x62e];
  puVar4[0x13de] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x13db) = extraout_XMM0_Da_x00948;
  *(undefined4 *)((long)puVar4 + 0x9edc) = extraout_XMM0_Db_x00948;
  *(undefined4 *)(puVar4 + 0x13dc) = extraout_XMM0_Dc_x00948;
  *(undefined4 *)((long)puVar4 + 0x9ee4) = extraout_XMM0_Dd_x00948;
  uVar2 = ((undefined8 *)puVar4[0x13de])[1];
  puVar4[0x631] = *(undefined8 *)puVar4[0x13de];
  puVar4[0x632] = uVar2;
  puVar4[-0x346] = 0x8ff060;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x62f) = extraout_XMM0_Da_x00949;
  *(undefined4 *)((long)puVar4 + 0x317c) = extraout_XMM0_Db_x00949;
  *(undefined4 *)(puVar4 + 0x630) = extraout_XMM0_Dc_x00949;
  *(undefined4 *)((long)puVar4 + 0x3184) = extraout_XMM0_Dd_x00949;
  puVar4[-0x346] = 0x8ff085;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8ff0a5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x13d9) = extraout_XMM0_Da_x00950;
  *(undefined4 *)((long)puVar4 + 0x9ecc) = extraout_XMM0_Db_x00950;
  *(undefined4 *)(puVar4 + 0x13da) = extraout_XMM0_Dc_x00950;
  *(undefined4 *)((long)puVar4 + 0x9ed4) = extraout_XMM0_Dd_x00950;
  puVar4[-0x346] = 0x8ff0ba;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x633) = extraout_XMM0_Da_x00951;
  *(undefined4 *)((long)puVar4 + 0x319c) = extraout_XMM0_Db_x00951;
  *(undefined4 *)(puVar4 + 0x634) = extraout_XMM0_Dc_x00951;
  *(undefined4 *)((long)puVar4 + 0x31a4) = extraout_XMM0_Dd_x00951;
  puVar4[-0x346] = 0x8ff0df;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8ff0ef;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x13d7) = extraout_XMM0_Da_x00952;
  *(undefined4 *)((long)puVar4 + 0x9ebc) = extraout_XMM0_Db_x00952;
  *(undefined4 *)(puVar4 + 0x13d8) = extraout_XMM0_Dc_x00952;
  *(undefined4 *)((long)puVar4 + 0x9ec4) = extraout_XMM0_Dd_x00952;
  puVar4[-0x346] = 0x8ff10f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x13e6];
  *puVar1 = extraout_XMM0_Da_x00953;
  puVar1[1] = extraout_XMM0_Db_x00953;
  puVar1[2] = extraout_XMM0_Dc_x00953;
  puVar1[3] = extraout_XMM0_Dd_x00953;
  puVar4[-0x346] = 0x8ff12f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x13de];
  *puVar1 = extraout_XMM0_Da_x00954;
  puVar1[1] = extraout_XMM0_Db_x00954;
  puVar1[2] = extraout_XMM0_Dc_x00954;
  puVar1[3] = extraout_XMM0_Dd_x00954;
  puVar4[0x635] = puVar4[0x1df5];
  puVar4[0x636] = puVar4[0x1df6];
  puVar4[0x637] = puVar4[0x1df3];
  puVar4[0x638] = puVar4[0x1df4];
  puVar4[0x639] = puVar4[0x1df1];
  puVar4[0x63a] = puVar4[0x1df2];
  puVar4[0x63b] = puVar4[0x1dfd];
  puVar4[0x63c] = puVar4[0x1dfe];
  puVar4[0x63d] = puVar4[0x1dfb];
  puVar4[0x63e] = puVar4[0x1dfc];
  puVar4[0x63f] = puVar4[0x1df9];
  puVar4[0x640] = puVar4[0x1dfa];
  puVar4[-0x346] = 0x8ff1a4;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x13d5] = puVar4[0x635];
  puVar4[0x13d6] = puVar4[0x636];
  puVar4[0x13d3] = puVar4[0x637];
  puVar4[0x13d4] = puVar4[0x638];
  puVar4[0x13d1] = puVar4[0x639];
  puVar4[0x13d2] = puVar4[0x63a];
  puVar4[0x13d0] = puVar4[0xcae];
  puVar4[0x13cd] = puVar4[0x63b];
  puVar4[0x13ce] = puVar4[0x63c];
  puVar4[0x13cb] = puVar4[0x63d];
  puVar4[0x13cc] = puVar4[0x63e];
  puVar4[0x13c9] = puVar4[0x63f];
  puVar4[0x13ca] = puVar4[0x640];
  puVar4[0x13c8] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x13c5) = extraout_XMM0_Da_x00955;
  *(undefined4 *)((long)puVar4 + 0x9e2c) = extraout_XMM0_Db_x00955;
  *(undefined4 *)(puVar4 + 0x13c6) = extraout_XMM0_Dc_x00955;
  *(undefined4 *)((long)puVar4 + 0x9e34) = extraout_XMM0_Dd_x00955;
  uVar2 = ((undefined8 *)puVar4[0x13c8])[1];
  puVar4[0x643] = *(undefined8 *)puVar4[0x13c8];
  puVar4[0x644] = uVar2;
  puVar4[-0x346] = 0x8ff24c;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x641) = extraout_XMM0_Da_x00956;
  *(undefined4 *)((long)puVar4 + 0x320c) = extraout_XMM0_Db_x00956;
  *(undefined4 *)(puVar4 + 0x642) = extraout_XMM0_Dc_x00956;
  *(undefined4 *)((long)puVar4 + 0x3214) = extraout_XMM0_Dd_x00956;
  puVar4[-0x346] = 0x8ff271;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8ff291;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x13c3) = extraout_XMM0_Da_x00957;
  *(undefined4 *)((long)puVar4 + 0x9e1c) = extraout_XMM0_Db_x00957;
  *(undefined4 *)(puVar4 + 0x13c4) = extraout_XMM0_Dc_x00957;
  *(undefined4 *)((long)puVar4 + 0x9e24) = extraout_XMM0_Dd_x00957;
  puVar4[-0x346] = 0x8ff2a6;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x645) = extraout_XMM0_Da_x00958;
  *(undefined4 *)((long)puVar4 + 0x322c) = extraout_XMM0_Db_x00958;
  *(undefined4 *)(puVar4 + 0x646) = extraout_XMM0_Dc_x00958;
  *(undefined4 *)((long)puVar4 + 0x3234) = extraout_XMM0_Dd_x00958;
  puVar4[-0x346] = 0x8ff2cb;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8ff2db;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x13c1) = extraout_XMM0_Da_x00959;
  *(undefined4 *)((long)puVar4 + 0x9e0c) = extraout_XMM0_Db_x00959;
  *(undefined4 *)(puVar4 + 0x13c2) = extraout_XMM0_Dc_x00959;
  *(undefined4 *)((long)puVar4 + 0x9e14) = extraout_XMM0_Dd_x00959;
  puVar4[-0x346] = 0x8ff2fb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x13d0];
  *puVar1 = extraout_XMM0_Da_x00960;
  puVar1[1] = extraout_XMM0_Db_x00960;
  puVar1[2] = extraout_XMM0_Dc_x00960;
  puVar1[3] = extraout_XMM0_Dd_x00960;
  puVar4[-0x346] = 0x8ff31b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x13c8];
  *puVar1 = extraout_XMM0_Da_x00961;
  puVar1[1] = extraout_XMM0_Db_x00961;
  puVar1[2] = extraout_XMM0_Dc_x00961;
  puVar1[3] = extraout_XMM0_Dd_x00961;
  puVar4[0x647] = puVar4[0x1df7];
  puVar4[0x648] = puVar4[0x1df8];
  puVar4[0x649] = puVar4[0x1df5];
  puVar4[0x64a] = puVar4[0x1df6];
  puVar4[0x64b] = puVar4[0x1df3];
  puVar4[0x64c] = puVar4[0x1df4];
  puVar4[0x64d] = puVar4[0x1def];
  puVar4[0x64e] = puVar4[0x1df0];
  puVar4[0x64f] = puVar4[0x1dfd];
  puVar4[0x650] = puVar4[0x1dfe];
  puVar4[0x651] = puVar4[0x1dfb];
  puVar4[0x652] = puVar4[0x1dfc];
  puVar4[-0x346] = 0x8ff390;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x13bf] = puVar4[0x647];
  puVar4[0x13c0] = puVar4[0x648];
  puVar4[0x13bd] = puVar4[0x649];
  puVar4[0x13be] = puVar4[0x64a];
  puVar4[0x13bb] = puVar4[0x64b];
  puVar4[0x13bc] = puVar4[0x64c];
  puVar4[0x13ba] = puVar4[0xccc];
  puVar4[0x13b7] = puVar4[0x64d];
  puVar4[0x13b8] = puVar4[0x64e];
  puVar4[0x13b5] = puVar4[0x64f];
  puVar4[0x13b6] = puVar4[0x650];
  puVar4[0x13b3] = puVar4[0x651];
  puVar4[0x13b4] = puVar4[0x652];
  puVar4[0x13b2] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x13af) = extraout_XMM0_Da_x00962;
  *(undefined4 *)((long)puVar4 + 0x9d7c) = extraout_XMM0_Db_x00962;
  *(undefined4 *)(puVar4 + 0x13b0) = extraout_XMM0_Dc_x00962;
  *(undefined4 *)((long)puVar4 + 0x9d84) = extraout_XMM0_Dd_x00962;
  uVar2 = ((undefined8 *)puVar4[0x13b2])[1];
  puVar4[0x655] = *(undefined8 *)puVar4[0x13b2];
  puVar4[0x656] = uVar2;
  puVar4[-0x346] = 0x8ff438;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x653) = extraout_XMM0_Da_x00963;
  *(undefined4 *)((long)puVar4 + 0x329c) = extraout_XMM0_Db_x00963;
  *(undefined4 *)(puVar4 + 0x654) = extraout_XMM0_Dc_x00963;
  *(undefined4 *)((long)puVar4 + 0x32a4) = extraout_XMM0_Dd_x00963;
  puVar4[-0x346] = 0x8ff45d;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8ff47d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x13ad) = extraout_XMM0_Da_x00964;
  *(undefined4 *)((long)puVar4 + 0x9d6c) = extraout_XMM0_Db_x00964;
  *(undefined4 *)(puVar4 + 0x13ae) = extraout_XMM0_Dc_x00964;
  *(undefined4 *)((long)puVar4 + 0x9d74) = extraout_XMM0_Dd_x00964;
  puVar4[-0x346] = 0x8ff492;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x657) = extraout_XMM0_Da_x00965;
  *(undefined4 *)((long)puVar4 + 0x32bc) = extraout_XMM0_Db_x00965;
  *(undefined4 *)(puVar4 + 0x658) = extraout_XMM0_Dc_x00965;
  *(undefined4 *)((long)puVar4 + 0x32c4) = extraout_XMM0_Dd_x00965;
  puVar4[-0x346] = 0x8ff4b7;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8ff4c7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x13ab) = extraout_XMM0_Da_x00966;
  *(undefined4 *)((long)puVar4 + 0x9d5c) = extraout_XMM0_Db_x00966;
  *(undefined4 *)(puVar4 + 0x13ac) = extraout_XMM0_Dc_x00966;
  *(undefined4 *)((long)puVar4 + 0x9d64) = extraout_XMM0_Dd_x00966;
  puVar4[-0x346] = 0x8ff4e7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x13ba];
  *puVar1 = extraout_XMM0_Da_x00967;
  puVar1[1] = extraout_XMM0_Db_x00967;
  puVar1[2] = extraout_XMM0_Dc_x00967;
  puVar1[3] = extraout_XMM0_Dd_x00967;
  puVar4[-0x346] = 0x8ff507;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x13b2];
  *puVar1 = extraout_XMM0_Da_x00968;
  puVar1[1] = extraout_XMM0_Db_x00968;
  puVar1[2] = extraout_XMM0_Dc_x00968;
  puVar1[3] = extraout_XMM0_Dd_x00968;
  puVar4[0x659] = puVar4[0x1df9];
  puVar4[0x65a] = puVar4[0x1dfa];
  puVar4[0x65b] = puVar4[0x1df7];
  puVar4[0x65c] = puVar4[0x1df8];
  puVar4[0x65d] = puVar4[0x1df5];
  puVar4[0x65e] = puVar4[0x1df6];
  puVar4[0x65f] = puVar4[0x1df1];
  puVar4[0x660] = puVar4[0x1df2];
  puVar4[0x661] = puVar4[0x1def];
  puVar4[0x662] = puVar4[0x1df0];
  puVar4[0x663] = puVar4[0x1dfd];
  puVar4[0x664] = puVar4[0x1dfe];
  puVar4[-0x346] = 0x8ff57c;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x13a9] = puVar4[0x659];
  puVar4[0x13aa] = puVar4[0x65a];
  puVar4[0x13a7] = puVar4[0x65b];
  puVar4[0x13a8] = puVar4[0x65c];
  puVar4[0x13a5] = puVar4[0x65d];
  puVar4[0x13a6] = puVar4[0x65e];
  puVar4[0x13a4] = puVar4[0xcec];
  puVar4[0x13a1] = puVar4[0x65f];
  puVar4[0x13a2] = puVar4[0x660];
  puVar4[0x139f] = puVar4[0x661];
  puVar4[0x13a0] = puVar4[0x662];
  puVar4[0x139d] = puVar4[0x663];
  puVar4[0x139e] = puVar4[0x664];
  puVar4[0x139c] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x1399) = extraout_XMM0_Da_x00969;
  *(undefined4 *)((long)puVar4 + 0x9ccc) = extraout_XMM0_Db_x00969;
  *(undefined4 *)(puVar4 + 0x139a) = extraout_XMM0_Dc_x00969;
  *(undefined4 *)((long)puVar4 + 0x9cd4) = extraout_XMM0_Dd_x00969;
  uVar2 = ((undefined8 *)puVar4[0x139c])[1];
  puVar4[0x667] = *(undefined8 *)puVar4[0x139c];
  puVar4[0x668] = uVar2;
  puVar4[-0x346] = 0x8ff624;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x665) = extraout_XMM0_Da_x00970;
  *(undefined4 *)((long)puVar4 + 0x332c) = extraout_XMM0_Db_x00970;
  *(undefined4 *)(puVar4 + 0x666) = extraout_XMM0_Dc_x00970;
  *(undefined4 *)((long)puVar4 + 0x3334) = extraout_XMM0_Dd_x00970;
  puVar4[-0x346] = 0x8ff649;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8ff669;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1397) = extraout_XMM0_Da_x00971;
  *(undefined4 *)((long)puVar4 + 0x9cbc) = extraout_XMM0_Db_x00971;
  *(undefined4 *)(puVar4 + 0x1398) = extraout_XMM0_Dc_x00971;
  *(undefined4 *)((long)puVar4 + 0x9cc4) = extraout_XMM0_Dd_x00971;
  puVar4[-0x346] = 0x8ff67e;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x669) = extraout_XMM0_Da_x00972;
  *(undefined4 *)((long)puVar4 + 0x334c) = extraout_XMM0_Db_x00972;
  *(undefined4 *)(puVar4 + 0x66a) = extraout_XMM0_Dc_x00972;
  *(undefined4 *)((long)puVar4 + 0x3354) = extraout_XMM0_Dd_x00972;
  puVar4[-0x346] = 0x8ff6a3;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8ff6b3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1395) = extraout_XMM0_Da_x00973;
  *(undefined4 *)((long)puVar4 + 0x9cac) = extraout_XMM0_Db_x00973;
  *(undefined4 *)(puVar4 + 0x1396) = extraout_XMM0_Dc_x00973;
  *(undefined4 *)((long)puVar4 + 0x9cb4) = extraout_XMM0_Dd_x00973;
  puVar4[-0x346] = 0x8ff6d3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x13a4];
  *puVar1 = extraout_XMM0_Da_x00974;
  puVar1[1] = extraout_XMM0_Db_x00974;
  puVar1[2] = extraout_XMM0_Dc_x00974;
  puVar1[3] = extraout_XMM0_Dd_x00974;
  puVar4[-0x346] = 0x8ff6f3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x139c];
  *puVar1 = extraout_XMM0_Da_x00975;
  puVar1[1] = extraout_XMM0_Db_x00975;
  puVar1[2] = extraout_XMM0_Dc_x00975;
  puVar1[3] = extraout_XMM0_Dd_x00975;
  puVar4[0x66b] = puVar4[0x1dfb];
  puVar4[0x66c] = puVar4[0x1dfc];
  puVar4[0x66d] = puVar4[0x1df9];
  puVar4[0x66e] = puVar4[0x1dfa];
  puVar4[0x66f] = puVar4[0x1df7];
  puVar4[0x670] = puVar4[0x1df8];
  puVar4[0x671] = puVar4[0x1df3];
  puVar4[0x672] = puVar4[0x1df4];
  puVar4[0x673] = puVar4[0x1df1];
  puVar4[0x674] = puVar4[0x1df2];
  puVar4[0x675] = puVar4[0x1def];
  puVar4[0x676] = puVar4[0x1df0];
  puVar4[-0x346] = 0x8ff768;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1393] = puVar4[0x66b];
  puVar4[0x1394] = puVar4[0x66c];
  puVar4[0x1391] = puVar4[0x66d];
  puVar4[0x1392] = puVar4[0x66e];
  puVar4[0x138f] = puVar4[0x66f];
  puVar4[0x1390] = puVar4[0x670];
  puVar4[0x138e] = puVar4[0xd0c];
  puVar4[0x138b] = puVar4[0x671];
  puVar4[0x138c] = puVar4[0x672];
  puVar4[0x1389] = puVar4[0x673];
  puVar4[0x138a] = puVar4[0x674];
  puVar4[4999] = puVar4[0x675];
  puVar4[5000] = puVar4[0x676];
  puVar4[0x1386] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x1383) = extraout_XMM0_Da_x00976;
  *(undefined4 *)((long)puVar4 + 0x9c1c) = extraout_XMM0_Db_x00976;
  *(undefined4 *)(puVar4 + 0x1384) = extraout_XMM0_Dc_x00976;
  *(undefined4 *)((long)puVar4 + 0x9c24) = extraout_XMM0_Dd_x00976;
  uVar2 = ((undefined8 *)puVar4[0x1386])[1];
  puVar4[0x679] = *(undefined8 *)puVar4[0x1386];
  puVar4[0x67a] = uVar2;
  puVar4[-0x346] = 0x8ff810;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x677) = extraout_XMM0_Da_x00977;
  *(undefined4 *)((long)puVar4 + 0x33bc) = extraout_XMM0_Db_x00977;
  *(undefined4 *)(puVar4 + 0x678) = extraout_XMM0_Dc_x00977;
  *(undefined4 *)((long)puVar4 + 0x33c4) = extraout_XMM0_Dd_x00977;
  puVar4[-0x346] = 0x8ff835;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8ff855;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1381) = extraout_XMM0_Da_x00978;
  *(undefined4 *)((long)puVar4 + 0x9c0c) = extraout_XMM0_Db_x00978;
  *(undefined4 *)(puVar4 + 0x1382) = extraout_XMM0_Dc_x00978;
  *(undefined4 *)((long)puVar4 + 0x9c14) = extraout_XMM0_Dd_x00978;
  puVar4[-0x346] = 0x8ff86a;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x67b) = extraout_XMM0_Da_x00979;
  *(undefined4 *)((long)puVar4 + 0x33dc) = extraout_XMM0_Db_x00979;
  *(undefined4 *)(puVar4 + 0x67c) = extraout_XMM0_Dc_x00979;
  *(undefined4 *)((long)puVar4 + 0x33e4) = extraout_XMM0_Dd_x00979;
  puVar4[-0x346] = 0x8ff88f;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8ff89f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x137f) = extraout_XMM0_Da_x00980;
  *(undefined4 *)((long)puVar4 + 0x9bfc) = extraout_XMM0_Db_x00980;
  *(undefined4 *)(puVar4 + 0x1380) = extraout_XMM0_Dc_x00980;
  *(undefined4 *)((long)puVar4 + 0x9c04) = extraout_XMM0_Dd_x00980;
  puVar4[-0x346] = 0x8ff8bf;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x138e];
  *puVar1 = extraout_XMM0_Da_x00981;
  puVar1[1] = extraout_XMM0_Db_x00981;
  puVar1[2] = extraout_XMM0_Dc_x00981;
  puVar1[3] = extraout_XMM0_Dd_x00981;
  puVar4[-0x346] = 0x8ff8df;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1386];
  *puVar1 = extraout_XMM0_Da_x00982;
  puVar1[1] = extraout_XMM0_Db_x00982;
  puVar1[2] = extraout_XMM0_Dc_x00982;
  puVar1[3] = extraout_XMM0_Dd_x00982;
  puVar4[0x67d] = puVar4[0x1dfd];
  puVar4[0x67e] = puVar4[0x1dfe];
  puVar4[0x67f] = puVar4[0x1dfb];
  puVar4[0x680] = puVar4[0x1dfc];
  puVar4[0x681] = puVar4[0x1df9];
  puVar4[0x682] = puVar4[0x1dfa];
  puVar4[0x683] = puVar4[0x1df5];
  puVar4[0x684] = puVar4[0x1df6];
  puVar4[0x685] = puVar4[0x1df3];
  puVar4[0x686] = puVar4[0x1df4];
  puVar4[0x687] = puVar4[0x1df1];
  puVar4[0x688] = puVar4[0x1df2];
  puVar4[-0x346] = 0x8ff954;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x137d] = puVar4[0x67d];
  puVar4[0x137e] = puVar4[0x67e];
  puVar4[0x137b] = puVar4[0x67f];
  puVar4[0x137c] = puVar4[0x680];
  puVar4[0x1379] = puVar4[0x681];
  puVar4[0x137a] = puVar4[0x682];
  puVar4[0x1378] = puVar4[0xcb6];
  puVar4[0x1375] = puVar4[0x683];
  puVar4[0x1376] = puVar4[0x684];
  puVar4[0x1373] = puVar4[0x685];
  puVar4[0x1374] = puVar4[0x686];
  puVar4[0x1371] = puVar4[0x687];
  puVar4[0x1372] = puVar4[0x688];
  puVar4[0x1370] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x136d) = extraout_XMM0_Da_x00983;
  *(undefined4 *)((long)puVar4 + 0x9b6c) = extraout_XMM0_Db_x00983;
  *(undefined4 *)(puVar4 + 0x136e) = extraout_XMM0_Dc_x00983;
  *(undefined4 *)((long)puVar4 + 0x9b74) = extraout_XMM0_Dd_x00983;
  uVar2 = ((undefined8 *)puVar4[0x1370])[1];
  puVar4[0x68b] = *(undefined8 *)puVar4[0x1370];
  puVar4[0x68c] = uVar2;
  puVar4[-0x346] = 0x8ff9fc;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x689) = extraout_XMM0_Da_x00984;
  *(undefined4 *)((long)puVar4 + 0x344c) = extraout_XMM0_Db_x00984;
  *(undefined4 *)(puVar4 + 0x68a) = extraout_XMM0_Dc_x00984;
  *(undefined4 *)((long)puVar4 + 0x3454) = extraout_XMM0_Dd_x00984;
  puVar4[-0x346] = 0x8ffa21;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8ffa41;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x136b) = extraout_XMM0_Da_x00985;
  *(undefined4 *)((long)puVar4 + 0x9b5c) = extraout_XMM0_Db_x00985;
  *(undefined4 *)(puVar4 + 0x136c) = extraout_XMM0_Dc_x00985;
  *(undefined4 *)((long)puVar4 + 0x9b64) = extraout_XMM0_Dd_x00985;
  puVar4[-0x346] = 0x8ffa56;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x68d) = extraout_XMM0_Da_x00986;
  *(undefined4 *)((long)puVar4 + 0x346c) = extraout_XMM0_Db_x00986;
  *(undefined4 *)(puVar4 + 0x68e) = extraout_XMM0_Dc_x00986;
  *(undefined4 *)((long)puVar4 + 0x3474) = extraout_XMM0_Dd_x00986;
  puVar4[-0x346] = 0x8ffa7b;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8ffa8b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1369) = extraout_XMM0_Da_x00987;
  *(undefined4 *)((long)puVar4 + 0x9b4c) = extraout_XMM0_Db_x00987;
  *(undefined4 *)(puVar4 + 0x136a) = extraout_XMM0_Dc_x00987;
  *(undefined4 *)((long)puVar4 + 0x9b54) = extraout_XMM0_Dd_x00987;
  puVar4[-0x346] = 0x8ffaab;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1378];
  *puVar1 = extraout_XMM0_Da_x00988;
  puVar1[1] = extraout_XMM0_Db_x00988;
  puVar1[2] = extraout_XMM0_Dc_x00988;
  puVar1[3] = extraout_XMM0_Dd_x00988;
  puVar4[-0x346] = 0x8ffacb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1370];
  *puVar1 = extraout_XMM0_Da_x00989;
  puVar1[1] = extraout_XMM0_Db_x00989;
  puVar1[2] = extraout_XMM0_Dc_x00989;
  puVar1[3] = extraout_XMM0_Dd_x00989;
  puVar4[0x68f] = puVar4[0x1def];
  puVar4[0x690] = puVar4[0x1df0];
  puVar4[0x691] = puVar4[0x1dfd];
  puVar4[0x692] = puVar4[0x1dfe];
  puVar4[0x693] = puVar4[0x1dfb];
  puVar4[0x694] = puVar4[0x1dfc];
  puVar4[0x695] = puVar4[0x1df7];
  puVar4[0x696] = puVar4[0x1df8];
  puVar4[0x697] = puVar4[0x1df5];
  puVar4[0x698] = puVar4[0x1df6];
  puVar4[0x699] = puVar4[0x1df3];
  puVar4[0x69a] = puVar4[0x1df4];
  puVar4[-0x346] = 0x8ffb40;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1367] = puVar4[0x68f];
  puVar4[0x1368] = puVar4[0x690];
  puVar4[0x1365] = puVar4[0x691];
  puVar4[0x1366] = puVar4[0x692];
  puVar4[0x1363] = puVar4[0x693];
  puVar4[0x1364] = puVar4[0x694];
  puVar4[0x1362] = puVar4[0xcd4];
  puVar4[0x135f] = puVar4[0x695];
  puVar4[0x1360] = puVar4[0x696];
  puVar4[0x135d] = puVar4[0x697];
  puVar4[0x135e] = puVar4[0x698];
  puVar4[0x135b] = puVar4[0x699];
  puVar4[0x135c] = puVar4[0x69a];
  puVar4[0x135a] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x1357) = extraout_XMM0_Da_x00990;
  *(undefined4 *)((long)puVar4 + 0x9abc) = extraout_XMM0_Db_x00990;
  *(undefined4 *)(puVar4 + 0x1358) = extraout_XMM0_Dc_x00990;
  *(undefined4 *)((long)puVar4 + 0x9ac4) = extraout_XMM0_Dd_x00990;
  uVar2 = ((undefined8 *)puVar4[0x135a])[1];
  puVar4[0x69d] = *(undefined8 *)puVar4[0x135a];
  puVar4[0x69e] = uVar2;
  puVar4[-0x346] = 0x8ffbe8;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x69b) = extraout_XMM0_Da_x00991;
  *(undefined4 *)((long)puVar4 + 0x34dc) = extraout_XMM0_Db_x00991;
  *(undefined4 *)(puVar4 + 0x69c) = extraout_XMM0_Dc_x00991;
  *(undefined4 *)((long)puVar4 + 0x34e4) = extraout_XMM0_Dd_x00991;
  puVar4[-0x346] = 0x8ffc0d;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8ffc2d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1355) = extraout_XMM0_Da_x00992;
  *(undefined4 *)((long)puVar4 + 0x9aac) = extraout_XMM0_Db_x00992;
  *(undefined4 *)(puVar4 + 0x1356) = extraout_XMM0_Dc_x00992;
  *(undefined4 *)((long)puVar4 + 0x9ab4) = extraout_XMM0_Dd_x00992;
  puVar4[-0x346] = 0x8ffc42;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x69f) = extraout_XMM0_Da_x00993;
  *(undefined4 *)((long)puVar4 + 0x34fc) = extraout_XMM0_Db_x00993;
  *(undefined4 *)(puVar4 + 0x6a0) = extraout_XMM0_Dc_x00993;
  *(undefined4 *)((long)puVar4 + 0x3504) = extraout_XMM0_Dd_x00993;
  puVar4[-0x346] = 0x8ffc67;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8ffc77;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1353) = extraout_XMM0_Da_x00994;
  *(undefined4 *)((long)puVar4 + 0x9a9c) = extraout_XMM0_Db_x00994;
  *(undefined4 *)(puVar4 + 0x1354) = extraout_XMM0_Dc_x00994;
  *(undefined4 *)((long)puVar4 + 0x9aa4) = extraout_XMM0_Dd_x00994;
  puVar4[-0x346] = 0x8ffc97;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1362];
  *puVar1 = extraout_XMM0_Da_x00995;
  puVar1[1] = extraout_XMM0_Db_x00995;
  puVar1[2] = extraout_XMM0_Dc_x00995;
  puVar1[3] = extraout_XMM0_Dd_x00995;
  puVar4[-0x346] = 0x8ffcb7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x135a];
  *puVar1 = extraout_XMM0_Da_x00996;
  puVar1[1] = extraout_XMM0_Db_x00996;
  puVar1[2] = extraout_XMM0_Dc_x00996;
  puVar1[3] = extraout_XMM0_Dd_x00996;
  puVar4[0x6a1] = puVar4[0x1df1];
  puVar4[0x6a2] = puVar4[0x1df2];
  puVar4[0x6a3] = puVar4[0x1def];
  puVar4[0x6a4] = puVar4[0x1df0];
  puVar4[0x6a5] = puVar4[0x1dfd];
  puVar4[0x6a6] = puVar4[0x1dfe];
  puVar4[0x6a7] = puVar4[0x1df9];
  puVar4[0x6a8] = puVar4[0x1dfa];
  puVar4[0x6a9] = puVar4[0x1df7];
  puVar4[0x6aa] = puVar4[0x1df8];
  puVar4[0x6ab] = puVar4[0x1df5];
  puVar4[0x6ac] = puVar4[0x1df6];
  puVar4[-0x346] = 0x8ffd2c;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1351] = puVar4[0x6a1];
  puVar4[0x1352] = puVar4[0x6a2];
  puVar4[0x134f] = puVar4[0x6a3];
  puVar4[0x1350] = puVar4[0x6a4];
  puVar4[0x134d] = puVar4[0x6a5];
  puVar4[0x134e] = puVar4[0x6a6];
  puVar4[0x134c] = puVar4[0xcf4];
  puVar4[0x1349] = puVar4[0x6a7];
  puVar4[0x134a] = puVar4[0x6a8];
  puVar4[0x1347] = puVar4[0x6a9];
  puVar4[0x1348] = puVar4[0x6aa];
  puVar4[0x1345] = puVar4[0x6ab];
  puVar4[0x1346] = puVar4[0x6ac];
  puVar4[0x1344] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x1341) = extraout_XMM0_Da_x00997;
  *(undefined4 *)((long)puVar4 + 0x9a0c) = extraout_XMM0_Db_x00997;
  *(undefined4 *)(puVar4 + 0x1342) = extraout_XMM0_Dc_x00997;
  *(undefined4 *)((long)puVar4 + 0x9a14) = extraout_XMM0_Dd_x00997;
  uVar2 = ((undefined8 *)puVar4[0x1344])[1];
  puVar4[0x6af] = *(undefined8 *)puVar4[0x1344];
  puVar4[0x6b0] = uVar2;
  puVar4[-0x346] = 0x8ffdd4;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x6ad) = extraout_XMM0_Da_x00998;
  *(undefined4 *)((long)puVar4 + 0x356c) = extraout_XMM0_Db_x00998;
  *(undefined4 *)(puVar4 + 0x6ae) = extraout_XMM0_Dc_x00998;
  *(undefined4 *)((long)puVar4 + 0x3574) = extraout_XMM0_Dd_x00998;
  puVar4[-0x346] = 0x8ffdf9;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8ffe19;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x133f) = extraout_XMM0_Da_x00999;
  *(undefined4 *)((long)puVar4 + 0x99fc) = extraout_XMM0_Db_x00999;
  *(undefined4 *)(puVar4 + 0x1340) = extraout_XMM0_Dc_x00999;
  *(undefined4 *)((long)puVar4 + 0x9a04) = extraout_XMM0_Dd_x00999;
  puVar4[-0x346] = 0x8ffe2e;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x6b1) = extraout_XMM0_Da_x01000;
  *(undefined4 *)((long)puVar4 + 0x358c) = extraout_XMM0_Db_x01000;
  *(undefined4 *)(puVar4 + 0x6b2) = extraout_XMM0_Dc_x01000;
  *(undefined4 *)((long)puVar4 + 0x3594) = extraout_XMM0_Dd_x01000;
  puVar4[-0x346] = 0x8ffe53;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x8ffe63;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x133d) = extraout_XMM0_Da_x01001;
  *(undefined4 *)((long)puVar4 + 0x99ec) = extraout_XMM0_Db_x01001;
  *(undefined4 *)(puVar4 + 0x133e) = extraout_XMM0_Dc_x01001;
  *(undefined4 *)((long)puVar4 + 0x99f4) = extraout_XMM0_Dd_x01001;
  puVar4[-0x346] = 0x8ffe83;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x134c];
  *puVar1 = extraout_XMM0_Da_x01002;
  puVar1[1] = extraout_XMM0_Db_x01002;
  puVar1[2] = extraout_XMM0_Dc_x01002;
  puVar1[3] = extraout_XMM0_Dd_x01002;
  puVar4[-0x346] = 0x8ffea3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1344];
  *puVar1 = extraout_XMM0_Da_x01003;
  puVar1[1] = extraout_XMM0_Db_x01003;
  puVar1[2] = extraout_XMM0_Dc_x01003;
  puVar1[3] = extraout_XMM0_Dd_x01003;
  puVar4[0x6b3] = puVar4[0x1df3];
  puVar4[0x6b4] = puVar4[0x1df4];
  puVar4[0x6b5] = puVar4[0x1df1];
  puVar4[0x6b6] = puVar4[0x1df2];
  puVar4[0x6b7] = puVar4[0x1def];
  puVar4[0x6b8] = puVar4[0x1df0];
  puVar4[0x6b9] = puVar4[0x1dfb];
  puVar4[0x6ba] = puVar4[0x1dfc];
  puVar4[0x6bb] = puVar4[0x1df9];
  puVar4[0x6bc] = puVar4[0x1dfa];
  puVar4[0x6bd] = puVar4[0x1df7];
  puVar4[0x6be] = puVar4[0x1df8];
  puVar4[-0x346] = 0x8fff18;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x133b] = puVar4[0x6b3];
  puVar4[0x133c] = puVar4[0x6b4];
  puVar4[0x1339] = puVar4[0x6b5];
  puVar4[0x133a] = puVar4[0x6b6];
  puVar4[0x1337] = puVar4[0x6b7];
  puVar4[0x1338] = puVar4[0x6b8];
  puVar4[0x1336] = puVar4[0xd14];
  puVar4[0x1333] = puVar4[0x6b9];
  puVar4[0x1334] = puVar4[0x6ba];
  puVar4[0x1331] = puVar4[0x6bb];
  puVar4[0x1332] = puVar4[0x6bc];
  puVar4[0x132f] = puVar4[0x6bd];
  puVar4[0x1330] = puVar4[0x6be];
  puVar4[0x132e] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x132b) = extraout_XMM0_Da_x01004;
  *(undefined4 *)((long)puVar4 + 0x995c) = extraout_XMM0_Db_x01004;
  *(undefined4 *)(puVar4 + 0x132c) = extraout_XMM0_Dc_x01004;
  *(undefined4 *)((long)puVar4 + 0x9964) = extraout_XMM0_Dd_x01004;
  uVar2 = ((undefined8 *)puVar4[0x132e])[1];
  puVar4[0x6c1] = *(undefined8 *)puVar4[0x132e];
  puVar4[0x6c2] = uVar2;
  puVar4[-0x346] = 0x8fffc0;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x6bf) = extraout_XMM0_Da_x01005;
  *(undefined4 *)((long)puVar4 + 0x35fc) = extraout_XMM0_Db_x01005;
  *(undefined4 *)(puVar4 + 0x6c0) = extraout_XMM0_Dc_x01005;
  *(undefined4 *)((long)puVar4 + 0x3604) = extraout_XMM0_Dd_x01005;
  puVar4[-0x346] = 0x8fffe5;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x900005;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1329) = extraout_XMM0_Da_x01006;
  *(undefined4 *)((long)puVar4 + 0x994c) = extraout_XMM0_Db_x01006;
  *(undefined4 *)(puVar4 + 0x132a) = extraout_XMM0_Dc_x01006;
  *(undefined4 *)((long)puVar4 + 0x9954) = extraout_XMM0_Dd_x01006;
  puVar4[-0x346] = 0x90001a;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x6c3) = extraout_XMM0_Da_x01007;
  *(undefined4 *)((long)puVar4 + 0x361c) = extraout_XMM0_Db_x01007;
  *(undefined4 *)(puVar4 + 0x6c4) = extraout_XMM0_Dc_x01007;
  *(undefined4 *)((long)puVar4 + 0x3624) = extraout_XMM0_Dd_x01007;
  puVar4[-0x346] = 0x90003f;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90004f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1327) = extraout_XMM0_Da_x01008;
  *(undefined4 *)((long)puVar4 + 0x993c) = extraout_XMM0_Db_x01008;
  *(undefined4 *)(puVar4 + 0x1328) = extraout_XMM0_Dc_x01008;
  *(undefined4 *)((long)puVar4 + 0x9944) = extraout_XMM0_Dd_x01008;
  puVar4[-0x346] = 0x90006f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1336];
  *puVar1 = extraout_XMM0_Da_x01009;
  puVar1[1] = extraout_XMM0_Db_x01009;
  puVar1[2] = extraout_XMM0_Dc_x01009;
  puVar1[3] = extraout_XMM0_Dd_x01009;
  puVar4[-0x346] = 0x90008f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x132e];
  *puVar1 = extraout_XMM0_Da_x01010;
  puVar1[1] = extraout_XMM0_Db_x01010;
  puVar1[2] = extraout_XMM0_Dc_x01010;
  puVar1[3] = extraout_XMM0_Dd_x01010;
  puVar4[0x6c5] = puVar4[0x1df5];
  puVar4[0x6c6] = puVar4[0x1df6];
  puVar4[0x6c7] = puVar4[0x1df3];
  puVar4[0x6c8] = puVar4[0x1df4];
  puVar4[0x6c9] = puVar4[0x1df1];
  puVar4[0x6ca] = puVar4[0x1df2];
  puVar4[0x6cb] = puVar4[0x1dfd];
  puVar4[0x6cc] = puVar4[0x1dfe];
  puVar4[0x6cd] = puVar4[0x1dfb];
  puVar4[0x6ce] = puVar4[0x1dfc];
  puVar4[0x6cf] = puVar4[0x1df9];
  puVar4[0x6d0] = puVar4[0x1dfa];
  puVar4[-0x346] = 0x900104;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1325] = puVar4[0x6c5];
  puVar4[0x1326] = puVar4[0x6c6];
  puVar4[0x1323] = puVar4[0x6c7];
  puVar4[0x1324] = puVar4[0x6c8];
  puVar4[0x1321] = puVar4[0x6c9];
  puVar4[0x1322] = puVar4[0x6ca];
  puVar4[0x1320] = puVar4[0xcae];
  puVar4[0x131d] = puVar4[0x6cb];
  puVar4[0x131e] = puVar4[0x6cc];
  puVar4[0x131b] = puVar4[0x6cd];
  puVar4[0x131c] = puVar4[0x6ce];
  puVar4[0x1319] = puVar4[0x6cf];
  puVar4[0x131a] = puVar4[0x6d0];
  puVar4[0x1318] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x1315) = extraout_XMM0_Da_x01011;
  *(undefined4 *)((long)puVar4 + 0x98ac) = extraout_XMM0_Db_x01011;
  *(undefined4 *)(puVar4 + 0x1316) = extraout_XMM0_Dc_x01011;
  *(undefined4 *)((long)puVar4 + 0x98b4) = extraout_XMM0_Dd_x01011;
  uVar2 = ((undefined8 *)puVar4[0x1318])[1];
  puVar4[0x6d3] = *(undefined8 *)puVar4[0x1318];
  puVar4[0x6d4] = uVar2;
  puVar4[-0x346] = 0x9001ac;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x6d1) = extraout_XMM0_Da_x01012;
  *(undefined4 *)((long)puVar4 + 0x368c) = extraout_XMM0_Db_x01012;
  *(undefined4 *)(puVar4 + 0x6d2) = extraout_XMM0_Dc_x01012;
  *(undefined4 *)((long)puVar4 + 0x3694) = extraout_XMM0_Dd_x01012;
  puVar4[-0x346] = 0x9001d1;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9001f1;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1313) = extraout_XMM0_Da_x01013;
  *(undefined4 *)((long)puVar4 + 0x989c) = extraout_XMM0_Db_x01013;
  *(undefined4 *)(puVar4 + 0x1314) = extraout_XMM0_Dc_x01013;
  *(undefined4 *)((long)puVar4 + 0x98a4) = extraout_XMM0_Dd_x01013;
  puVar4[-0x346] = 0x900206;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x6d5) = extraout_XMM0_Da_x01014;
  *(undefined4 *)((long)puVar4 + 0x36ac) = extraout_XMM0_Db_x01014;
  *(undefined4 *)(puVar4 + 0x6d6) = extraout_XMM0_Dc_x01014;
  *(undefined4 *)((long)puVar4 + 0x36b4) = extraout_XMM0_Dd_x01014;
  puVar4[-0x346] = 0x90022b;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90023b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1311) = extraout_XMM0_Da_x01015;
  *(undefined4 *)((long)puVar4 + 0x988c) = extraout_XMM0_Db_x01015;
  *(undefined4 *)(puVar4 + 0x1312) = extraout_XMM0_Dc_x01015;
  *(undefined4 *)((long)puVar4 + 0x9894) = extraout_XMM0_Dd_x01015;
  puVar4[-0x346] = 0x90025b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1320];
  *puVar1 = extraout_XMM0_Da_x01016;
  puVar1[1] = extraout_XMM0_Db_x01016;
  puVar1[2] = extraout_XMM0_Dc_x01016;
  puVar1[3] = extraout_XMM0_Dd_x01016;
  puVar4[-0x346] = 0x90027b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1318];
  *puVar1 = extraout_XMM0_Da_x01017;
  puVar1[1] = extraout_XMM0_Db_x01017;
  puVar1[2] = extraout_XMM0_Dc_x01017;
  puVar1[3] = extraout_XMM0_Dd_x01017;
  puVar4[0x6d7] = puVar4[0x1df7];
  puVar4[0x6d8] = puVar4[0x1df8];
  puVar4[0x6d9] = puVar4[0x1df5];
  puVar4[0x6da] = puVar4[0x1df6];
  puVar4[0x6db] = puVar4[0x1df3];
  puVar4[0x6dc] = puVar4[0x1df4];
  puVar4[0x6dd] = puVar4[0x1def];
  puVar4[0x6de] = puVar4[0x1df0];
  puVar4[0x6df] = puVar4[0x1dfd];
  puVar4[0x6e0] = puVar4[0x1dfe];
  puVar4[0x6e1] = puVar4[0x1dfb];
  puVar4[0x6e2] = puVar4[0x1dfc];
  puVar4[-0x346] = 0x9002f0;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x130f] = puVar4[0x6d7];
  puVar4[0x1310] = puVar4[0x6d8];
  puVar4[0x130d] = puVar4[0x6d9];
  puVar4[0x130e] = puVar4[0x6da];
  puVar4[0x130b] = puVar4[0x6db];
  puVar4[0x130c] = puVar4[0x6dc];
  puVar4[0x130a] = puVar4[0xccc];
  puVar4[0x1307] = puVar4[0x6dd];
  puVar4[0x1308] = puVar4[0x6de];
  puVar4[0x1305] = puVar4[0x6df];
  puVar4[0x1306] = puVar4[0x6e0];
  puVar4[0x1303] = puVar4[0x6e1];
  puVar4[0x1304] = puVar4[0x6e2];
  puVar4[0x1302] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x12ff) = extraout_XMM0_Da_x01018;
  *(undefined4 *)((long)puVar4 + 0x97fc) = extraout_XMM0_Db_x01018;
  *(undefined4 *)(puVar4 + 0x1300) = extraout_XMM0_Dc_x01018;
  *(undefined4 *)((long)puVar4 + 0x9804) = extraout_XMM0_Dd_x01018;
  uVar2 = ((undefined8 *)puVar4[0x1302])[1];
  puVar4[0x6e5] = *(undefined8 *)puVar4[0x1302];
  puVar4[0x6e6] = uVar2;
  puVar4[-0x346] = 0x900398;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x6e3) = extraout_XMM0_Da_x01019;
  *(undefined4 *)((long)puVar4 + 0x371c) = extraout_XMM0_Db_x01019;
  *(undefined4 *)(puVar4 + 0x6e4) = extraout_XMM0_Dc_x01019;
  *(undefined4 *)((long)puVar4 + 0x3724) = extraout_XMM0_Dd_x01019;
  puVar4[-0x346] = 0x9003bd;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9003dd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x12fd) = extraout_XMM0_Da_x01020;
  *(undefined4 *)((long)puVar4 + 0x97ec) = extraout_XMM0_Db_x01020;
  *(undefined4 *)(puVar4 + 0x12fe) = extraout_XMM0_Dc_x01020;
  *(undefined4 *)((long)puVar4 + 0x97f4) = extraout_XMM0_Dd_x01020;
  puVar4[-0x346] = 0x9003f2;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x6e7) = extraout_XMM0_Da_x01021;
  *(undefined4 *)((long)puVar4 + 0x373c) = extraout_XMM0_Db_x01021;
  *(undefined4 *)(puVar4 + 0x6e8) = extraout_XMM0_Dc_x01021;
  *(undefined4 *)((long)puVar4 + 0x3744) = extraout_XMM0_Dd_x01021;
  puVar4[-0x346] = 0x900417;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x900427;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x12fb) = extraout_XMM0_Da_x01022;
  *(undefined4 *)((long)puVar4 + 0x97dc) = extraout_XMM0_Db_x01022;
  *(undefined4 *)(puVar4 + 0x12fc) = extraout_XMM0_Dc_x01022;
  *(undefined4 *)((long)puVar4 + 0x97e4) = extraout_XMM0_Dd_x01022;
  puVar4[-0x346] = 0x900447;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x130a];
  *puVar1 = extraout_XMM0_Da_x01023;
  puVar1[1] = extraout_XMM0_Db_x01023;
  puVar1[2] = extraout_XMM0_Dc_x01023;
  puVar1[3] = extraout_XMM0_Dd_x01023;
  puVar4[-0x346] = 0x900467;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1302];
  *puVar1 = extraout_XMM0_Da_x01024;
  puVar1[1] = extraout_XMM0_Db_x01024;
  puVar1[2] = extraout_XMM0_Dc_x01024;
  puVar1[3] = extraout_XMM0_Dd_x01024;
  puVar4[0x6e9] = puVar4[0x1df9];
  puVar4[0x6ea] = puVar4[0x1dfa];
  puVar4[0x6eb] = puVar4[0x1df7];
  puVar4[0x6ec] = puVar4[0x1df8];
  puVar4[0x6ed] = puVar4[0x1df5];
  puVar4[0x6ee] = puVar4[0x1df6];
  puVar4[0x6ef] = puVar4[0x1df1];
  puVar4[0x6f0] = puVar4[0x1df2];
  puVar4[0x6f1] = puVar4[0x1def];
  puVar4[0x6f2] = puVar4[0x1df0];
  puVar4[0x6f3] = puVar4[0x1dfd];
  puVar4[0x6f4] = puVar4[0x1dfe];
  puVar4[-0x346] = 0x9004dc;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x12f9] = puVar4[0x6e9];
  puVar4[0x12fa] = puVar4[0x6ea];
  puVar4[0x12f7] = puVar4[0x6eb];
  puVar4[0x12f8] = puVar4[0x6ec];
  puVar4[0x12f5] = puVar4[0x6ed];
  puVar4[0x12f6] = puVar4[0x6ee];
  puVar4[0x12f4] = puVar4[0xcec];
  puVar4[0x12f1] = puVar4[0x6ef];
  puVar4[0x12f2] = puVar4[0x6f0];
  puVar4[0x12ef] = puVar4[0x6f1];
  puVar4[0x12f0] = puVar4[0x6f2];
  puVar4[0x12ed] = puVar4[0x6f3];
  puVar4[0x12ee] = puVar4[0x6f4];
  puVar4[0x12ec] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x12e9) = extraout_XMM0_Da_x01025;
  *(undefined4 *)((long)puVar4 + 0x974c) = extraout_XMM0_Db_x01025;
  *(undefined4 *)(puVar4 + 0x12ea) = extraout_XMM0_Dc_x01025;
  *(undefined4 *)((long)puVar4 + 0x9754) = extraout_XMM0_Dd_x01025;
  uVar2 = ((undefined8 *)puVar4[0x12ec])[1];
  puVar4[0x6f7] = *(undefined8 *)puVar4[0x12ec];
  puVar4[0x6f8] = uVar2;
  puVar4[-0x346] = 0x900584;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x6f5) = extraout_XMM0_Da_x01026;
  *(undefined4 *)((long)puVar4 + 0x37ac) = extraout_XMM0_Db_x01026;
  *(undefined4 *)(puVar4 + 0x6f6) = extraout_XMM0_Dc_x01026;
  *(undefined4 *)((long)puVar4 + 0x37b4) = extraout_XMM0_Dd_x01026;
  puVar4[-0x346] = 0x9005a9;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9005c9;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x12e7) = extraout_XMM0_Da_x01027;
  *(undefined4 *)((long)puVar4 + 0x973c) = extraout_XMM0_Db_x01027;
  *(undefined4 *)(puVar4 + 0x12e8) = extraout_XMM0_Dc_x01027;
  *(undefined4 *)((long)puVar4 + 0x9744) = extraout_XMM0_Dd_x01027;
  puVar4[-0x346] = 0x9005de;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x6f9) = extraout_XMM0_Da_x01028;
  *(undefined4 *)((long)puVar4 + 0x37cc) = extraout_XMM0_Db_x01028;
  *(undefined4 *)(puVar4 + 0x6fa) = extraout_XMM0_Dc_x01028;
  *(undefined4 *)((long)puVar4 + 0x37d4) = extraout_XMM0_Dd_x01028;
  puVar4[-0x346] = 0x900603;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x900613;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x12e5) = extraout_XMM0_Da_x01029;
  *(undefined4 *)((long)puVar4 + 0x972c) = extraout_XMM0_Db_x01029;
  *(undefined4 *)(puVar4 + 0x12e6) = extraout_XMM0_Dc_x01029;
  *(undefined4 *)((long)puVar4 + 0x9734) = extraout_XMM0_Dd_x01029;
  puVar4[-0x346] = 0x900633;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x12f4];
  *puVar1 = extraout_XMM0_Da_x01030;
  puVar1[1] = extraout_XMM0_Db_x01030;
  puVar1[2] = extraout_XMM0_Dc_x01030;
  puVar1[3] = extraout_XMM0_Dd_x01030;
  puVar4[-0x346] = 0x900653;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x12ec];
  *puVar1 = extraout_XMM0_Da_x01031;
  puVar1[1] = extraout_XMM0_Db_x01031;
  puVar1[2] = extraout_XMM0_Dc_x01031;
  puVar1[3] = extraout_XMM0_Dd_x01031;
  puVar4[0x6fb] = puVar4[0x1dfb];
  puVar4[0x6fc] = puVar4[0x1dfc];
  puVar4[0x6fd] = puVar4[0x1df9];
  puVar4[0x6fe] = puVar4[0x1dfa];
  puVar4[0x6ff] = puVar4[0x1df7];
  puVar4[0x700] = puVar4[0x1df8];
  puVar4[0x701] = puVar4[0x1df3];
  puVar4[0x702] = puVar4[0x1df4];
  puVar4[0x703] = puVar4[0x1df1];
  puVar4[0x704] = puVar4[0x1df2];
  puVar4[0x705] = puVar4[0x1def];
  puVar4[0x706] = puVar4[0x1df0];
  puVar4[-0x346] = 0x9006c8;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x12e3] = puVar4[0x6fb];
  puVar4[0x12e4] = puVar4[0x6fc];
  puVar4[0x12e1] = puVar4[0x6fd];
  puVar4[0x12e2] = puVar4[0x6fe];
  puVar4[0x12df] = puVar4[0x6ff];
  puVar4[0x12e0] = puVar4[0x700];
  puVar4[0x12de] = puVar4[0xd0c];
  puVar4[0x12db] = puVar4[0x701];
  puVar4[0x12dc] = puVar4[0x702];
  puVar4[0x12d9] = puVar4[0x703];
  puVar4[0x12da] = puVar4[0x704];
  puVar4[0x12d7] = puVar4[0x705];
  puVar4[0x12d8] = puVar4[0x706];
  puVar4[0x12d6] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x12d3) = extraout_XMM0_Da_x01032;
  *(undefined4 *)((long)puVar4 + 0x969c) = extraout_XMM0_Db_x01032;
  *(undefined4 *)(puVar4 + 0x12d4) = extraout_XMM0_Dc_x01032;
  *(undefined4 *)((long)puVar4 + 0x96a4) = extraout_XMM0_Dd_x01032;
  uVar2 = ((undefined8 *)puVar4[0x12d6])[1];
  puVar4[0x709] = *(undefined8 *)puVar4[0x12d6];
  puVar4[0x70a] = uVar2;
  puVar4[-0x346] = 0x900770;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x707) = extraout_XMM0_Da_x01033;
  *(undefined4 *)((long)puVar4 + 0x383c) = extraout_XMM0_Db_x01033;
  *(undefined4 *)(puVar4 + 0x708) = extraout_XMM0_Dc_x01033;
  *(undefined4 *)((long)puVar4 + 0x3844) = extraout_XMM0_Dd_x01033;
  puVar4[-0x346] = 0x900795;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9007b5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x12d1) = extraout_XMM0_Da_x01034;
  *(undefined4 *)((long)puVar4 + 0x968c) = extraout_XMM0_Db_x01034;
  *(undefined4 *)(puVar4 + 0x12d2) = extraout_XMM0_Dc_x01034;
  *(undefined4 *)((long)puVar4 + 0x9694) = extraout_XMM0_Dd_x01034;
  puVar4[-0x346] = 0x9007ca;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x70b) = extraout_XMM0_Da_x01035;
  *(undefined4 *)((long)puVar4 + 0x385c) = extraout_XMM0_Db_x01035;
  *(undefined4 *)(puVar4 + 0x70c) = extraout_XMM0_Dc_x01035;
  *(undefined4 *)((long)puVar4 + 0x3864) = extraout_XMM0_Dd_x01035;
  puVar4[-0x346] = 0x9007ef;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9007ff;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x12cf) = extraout_XMM0_Da_x01036;
  *(undefined4 *)((long)puVar4 + 0x967c) = extraout_XMM0_Db_x01036;
  *(undefined4 *)(puVar4 + 0x12d0) = extraout_XMM0_Dc_x01036;
  *(undefined4 *)((long)puVar4 + 0x9684) = extraout_XMM0_Dd_x01036;
  puVar4[-0x346] = 0x90081f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x12de];
  *puVar1 = extraout_XMM0_Da_x01037;
  puVar1[1] = extraout_XMM0_Db_x01037;
  puVar1[2] = extraout_XMM0_Dc_x01037;
  puVar1[3] = extraout_XMM0_Dd_x01037;
  puVar4[-0x346] = 0x90083f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x12d6];
  *puVar1 = extraout_XMM0_Da_x01038;
  puVar1[1] = extraout_XMM0_Db_x01038;
  puVar1[2] = extraout_XMM0_Dc_x01038;
  puVar1[3] = extraout_XMM0_Dd_x01038;
  puVar4[-0x346] = 0x90085f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1ded) = extraout_XMM0_Da_x01039;
  *(undefined4 *)((long)puVar4 + 0xef6c) = extraout_XMM0_Db_x01039;
  *(undefined4 *)(puVar4 + 0x1dee) = extraout_XMM0_Dc_x01039;
  *(undefined4 *)((long)puVar4 + 0xef74) = extraout_XMM0_Dd_x01039;
  puVar4[-0x346] = 0x90087c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1deb) = extraout_XMM0_Da_x01040;
  *(undefined4 *)((long)puVar4 + 0xef5c) = extraout_XMM0_Db_x01040;
  *(undefined4 *)(puVar4 + 0x1dec) = extraout_XMM0_Dc_x01040;
  *(undefined4 *)((long)puVar4 + 0xef64) = extraout_XMM0_Dd_x01040;
  puVar4[-0x346] = 0x900899;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1de9) = extraout_XMM0_Da_x01041;
  *(undefined4 *)((long)puVar4 + 0xef4c) = extraout_XMM0_Db_x01041;
  *(undefined4 *)(puVar4 + 0x1dea) = extraout_XMM0_Dc_x01041;
  *(undefined4 *)((long)puVar4 + 0xef54) = extraout_XMM0_Dd_x01041;
  puVar4[-0x346] = 0x9008b6;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1de7) = extraout_XMM0_Da_x01042;
  *(undefined4 *)((long)puVar4 + 0xef3c) = extraout_XMM0_Db_x01042;
  *(undefined4 *)(puVar4 + 0x1de8) = extraout_XMM0_Dc_x01042;
  *(undefined4 *)((long)puVar4 + 0xef44) = extraout_XMM0_Dd_x01042;
  puVar4[-0x346] = 0x9008d3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1de5) = extraout_XMM0_Da_x01043;
  *(undefined4 *)((long)puVar4 + 0xef2c) = extraout_XMM0_Db_x01043;
  *(undefined4 *)(puVar4 + 0x1de6) = extraout_XMM0_Dc_x01043;
  *(undefined4 *)((long)puVar4 + 0xef34) = extraout_XMM0_Dd_x01043;
  puVar4[-0x346] = 0x9008f0;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1de3) = extraout_XMM0_Da_x01044;
  *(undefined4 *)((long)puVar4 + 0xef1c) = extraout_XMM0_Db_x01044;
  *(undefined4 *)(puVar4 + 0x1de4) = extraout_XMM0_Dc_x01044;
  *(undefined4 *)((long)puVar4 + 0xef24) = extraout_XMM0_Dd_x01044;
  puVar4[-0x346] = 0x90090d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1de1) = extraout_XMM0_Da_x01045;
  *(undefined4 *)((long)puVar4 + 0xef0c) = extraout_XMM0_Db_x01045;
  *(undefined4 *)(puVar4 + 0x1de2) = extraout_XMM0_Dc_x01045;
  *(undefined4 *)((long)puVar4 + 0xef14) = extraout_XMM0_Dd_x01045;
  puVar4[-0x346] = 0x90092a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1ddf) = extraout_XMM0_Da_x01046;
  *(undefined4 *)((long)puVar4 + 0xeefc) = extraout_XMM0_Db_x01046;
  *(undefined4 *)(puVar4 + 0x1de0) = extraout_XMM0_Dc_x01046;
  *(undefined4 *)((long)puVar4 + 0xef04) = extraout_XMM0_Dd_x01046;
  puVar4[-0x346] = 0x90093e;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1dfd) = extraout_XMM0_Da_x01047;
  *(undefined4 *)((long)puVar4 + 0xefec) = extraout_XMM0_Db_x01047;
  *(undefined4 *)(puVar4 + 0x1dfe) = extraout_XMM0_Dc_x01047;
  *(undefined4 *)((long)puVar4 + 0xeff4) = extraout_XMM0_Dd_x01047;
  puVar4[-0x346] = 0x900952;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1dfb) = extraout_XMM0_Da_x01048;
  *(undefined4 *)((long)puVar4 + 0xefdc) = extraout_XMM0_Db_x01048;
  *(undefined4 *)(puVar4 + 0x1dfc) = extraout_XMM0_Dc_x01048;
  *(undefined4 *)((long)puVar4 + 0xefe4) = extraout_XMM0_Dd_x01048;
  puVar4[-0x346] = 0x900966;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1df9) = extraout_XMM0_Da_x01049;
  *(undefined4 *)((long)puVar4 + 0xefcc) = extraout_XMM0_Db_x01049;
  *(undefined4 *)(puVar4 + 0x1dfa) = extraout_XMM0_Dc_x01049;
  *(undefined4 *)((long)puVar4 + 0xefd4) = extraout_XMM0_Dd_x01049;
  puVar4[-0x346] = 0x90097a;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1df7) = extraout_XMM0_Da_x01050;
  *(undefined4 *)((long)puVar4 + 0xefbc) = extraout_XMM0_Db_x01050;
  *(undefined4 *)(puVar4 + 0x1df8) = extraout_XMM0_Dc_x01050;
  *(undefined4 *)((long)puVar4 + 0xefc4) = extraout_XMM0_Dd_x01050;
  puVar4[-0x346] = 0x90098e;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1df5) = extraout_XMM0_Da_x01051;
  *(undefined4 *)((long)puVar4 + 0xefac) = extraout_XMM0_Db_x01051;
  *(undefined4 *)(puVar4 + 0x1df6) = extraout_XMM0_Dc_x01051;
  *(undefined4 *)((long)puVar4 + 0xefb4) = extraout_XMM0_Dd_x01051;
  puVar4[-0x346] = 0x9009a2;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1df3) = extraout_XMM0_Da_x01052;
  *(undefined4 *)((long)puVar4 + 0xef9c) = extraout_XMM0_Db_x01052;
  *(undefined4 *)(puVar4 + 0x1df4) = extraout_XMM0_Dc_x01052;
  *(undefined4 *)((long)puVar4 + 0xefa4) = extraout_XMM0_Dd_x01052;
  puVar4[-0x346] = 0x9009b6;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1df1) = extraout_XMM0_Da_x01053;
  *(undefined4 *)((long)puVar4 + 0xef8c) = extraout_XMM0_Db_x01053;
  *(undefined4 *)(puVar4 + 0x1df2) = extraout_XMM0_Dc_x01053;
  *(undefined4 *)((long)puVar4 + 0xef94) = extraout_XMM0_Dd_x01053;
  puVar4[-0x346] = 0x9009ca;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x1def) = extraout_XMM0_Da_x01054;
  *(undefined4 *)((long)puVar4 + 0xef7c) = extraout_XMM0_Db_x01054;
  *(undefined4 *)(puVar4 + 0x1df0) = extraout_XMM0_Dc_x01054;
  *(undefined4 *)((long)puVar4 + 0xef84) = extraout_XMM0_Dd_x01054;
  puVar4[0x70f] = puVar4[0x1dfd];
  puVar4[0x710] = puVar4[0x1dfe];
  puVar4[0x711] = puVar4[0x1dfb];
  puVar4[0x712] = puVar4[0x1dfc];
  puVar4[0x713] = puVar4[0x1df9];
  puVar4[0x714] = puVar4[0x1dfa];
  puVar4[0x715] = puVar4[0x1df5];
  puVar4[0x716] = puVar4[0x1df6];
  puVar4[0x717] = puVar4[0x1df3];
  puVar4[0x718] = puVar4[0x1df4];
  puVar4[0x719] = puVar4[0x1df1];
  puVar4[0x71a] = puVar4[0x1df2];
  puVar4[-0x346] = 0x900a3e;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x900a4b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x12cd] = puVar4[0x70f];
  puVar4[0x12ce] = puVar4[0x710];
  puVar4[0x12cb] = puVar4[0x711];
  puVar4[0x12cc] = puVar4[0x712];
  puVar4[0x12c9] = puVar4[0x713];
  puVar4[0x12ca] = puVar4[0x714];
  puVar4[0x12c8] = puVar4[0xcb6];
  puVar4[0x12c5] = puVar4[0x715];
  puVar4[0x12c6] = puVar4[0x716];
  puVar4[0x12c3] = puVar4[0x717];
  puVar4[0x12c4] = puVar4[0x718];
  puVar4[0x12c1] = puVar4[0x719];
  puVar4[0x12c2] = puVar4[0x71a];
  puVar4[0x12c0] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x12bd) = extraout_XMM0_Da_x01055;
  *(undefined4 *)((long)puVar4 + 0x95ec) = extraout_XMM0_Db_x01055;
  *(undefined4 *)(puVar4 + 0x12be) = extraout_XMM0_Dc_x01055;
  *(undefined4 *)((long)puVar4 + 0x95f4) = extraout_XMM0_Dd_x01055;
  uVar2 = ((undefined8 *)puVar4[0x12c0])[1];
  puVar4[0x71d] = *(undefined8 *)puVar4[0x12c0];
  puVar4[0x71e] = uVar2;
  puVar4[-0x346] = 0x900af3;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x71b) = extraout_XMM0_Da_x01056;
  *(undefined4 *)((long)puVar4 + 0x38dc) = extraout_XMM0_Db_x01056;
  *(undefined4 *)(puVar4 + 0x71c) = extraout_XMM0_Dc_x01056;
  *(undefined4 *)((long)puVar4 + 0x38e4) = extraout_XMM0_Dd_x01056;
  puVar4[-0x346] = 0x900b18;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x900b38;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x12bb) = extraout_XMM0_Da_x01057;
  *(undefined4 *)((long)puVar4 + 0x95dc) = extraout_XMM0_Db_x01057;
  *(undefined4 *)(puVar4 + 0x12bc) = extraout_XMM0_Dc_x01057;
  *(undefined4 *)((long)puVar4 + 0x95e4) = extraout_XMM0_Dd_x01057;
  puVar4[-0x346] = 0x900b4d;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x71f) = extraout_XMM0_Da_x01058;
  *(undefined4 *)((long)puVar4 + 0x38fc) = extraout_XMM0_Db_x01058;
  *(undefined4 *)(puVar4 + 0x720) = extraout_XMM0_Dc_x01058;
  *(undefined4 *)((long)puVar4 + 0x3904) = extraout_XMM0_Dd_x01058;
  puVar4[-0x346] = 0x900b72;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x900b82;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x12b9) = extraout_XMM0_Da_x01059;
  *(undefined4 *)((long)puVar4 + 0x95cc) = extraout_XMM0_Db_x01059;
  *(undefined4 *)(puVar4 + 0x12ba) = extraout_XMM0_Dc_x01059;
  *(undefined4 *)((long)puVar4 + 0x95d4) = extraout_XMM0_Dd_x01059;
  puVar4[-0x346] = 0x900ba2;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x12c8];
  *puVar1 = extraout_XMM0_Da_x01060;
  puVar1[1] = extraout_XMM0_Db_x01060;
  puVar1[2] = extraout_XMM0_Dc_x01060;
  puVar1[3] = extraout_XMM0_Dd_x01060;
  puVar4[-0x346] = 0x900bc2;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x12c0];
  *puVar1 = extraout_XMM0_Da_x01061;
  puVar1[1] = extraout_XMM0_Db_x01061;
  puVar1[2] = extraout_XMM0_Dc_x01061;
  puVar1[3] = extraout_XMM0_Dd_x01061;
  puVar4[0x723] = puVar4[0x1def];
  puVar4[0x724] = puVar4[0x1df0];
  puVar4[0x725] = puVar4[0x1dfd];
  puVar4[0x726] = puVar4[0x1dfe];
  puVar4[0x727] = puVar4[0x1dfb];
  puVar4[0x728] = puVar4[0x1dfc];
  puVar4[0x729] = puVar4[0x1df7];
  puVar4[0x72a] = puVar4[0x1df8];
  puVar4[0x72b] = puVar4[0x1df5];
  puVar4[0x72c] = puVar4[0x1df6];
  puVar4[0x72d] = puVar4[0x1df3];
  puVar4[0x72e] = puVar4[0x1df4];
  puVar4[-0x346] = 0x900c39;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x900c46;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x12b7] = puVar4[0x723];
  puVar4[0x12b8] = puVar4[0x724];
  puVar4[0x12b5] = puVar4[0x725];
  puVar4[0x12b6] = puVar4[0x726];
  puVar4[0x12b3] = puVar4[0x727];
  puVar4[0x12b4] = puVar4[0x728];
  puVar4[0x12b2] = puVar4[0xcd4];
  puVar4[0x12af] = puVar4[0x729];
  puVar4[0x12b0] = puVar4[0x72a];
  puVar4[0x12ad] = puVar4[0x72b];
  puVar4[0x12ae] = puVar4[0x72c];
  puVar4[0x12ab] = puVar4[0x72d];
  puVar4[0x12ac] = puVar4[0x72e];
  puVar4[0x12aa] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x12a7) = extraout_XMM0_Da_x01062;
  *(undefined4 *)((long)puVar4 + 0x953c) = extraout_XMM0_Db_x01062;
  *(undefined4 *)(puVar4 + 0x12a8) = extraout_XMM0_Dc_x01062;
  *(undefined4 *)((long)puVar4 + 0x9544) = extraout_XMM0_Dd_x01062;
  uVar2 = ((undefined8 *)puVar4[0x12aa])[1];
  puVar4[0x731] = *(undefined8 *)puVar4[0x12aa];
  puVar4[0x732] = uVar2;
  puVar4[-0x346] = 0x900cee;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x72f) = extraout_XMM0_Da_x01063;
  *(undefined4 *)((long)puVar4 + 0x397c) = extraout_XMM0_Db_x01063;
  *(undefined4 *)(puVar4 + 0x730) = extraout_XMM0_Dc_x01063;
  *(undefined4 *)((long)puVar4 + 0x3984) = extraout_XMM0_Dd_x01063;
  puVar4[-0x346] = 0x900d13;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x900d33;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x12a5) = extraout_XMM0_Da_x01064;
  *(undefined4 *)((long)puVar4 + 0x952c) = extraout_XMM0_Db_x01064;
  *(undefined4 *)(puVar4 + 0x12a6) = extraout_XMM0_Dc_x01064;
  *(undefined4 *)((long)puVar4 + 0x9534) = extraout_XMM0_Dd_x01064;
  puVar4[-0x346] = 0x900d48;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x733) = extraout_XMM0_Da_x01065;
  *(undefined4 *)((long)puVar4 + 0x399c) = extraout_XMM0_Db_x01065;
  *(undefined4 *)(puVar4 + 0x734) = extraout_XMM0_Dc_x01065;
  *(undefined4 *)((long)puVar4 + 0x39a4) = extraout_XMM0_Dd_x01065;
  puVar4[-0x346] = 0x900d6d;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x900d7d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x12a3) = extraout_XMM0_Da_x01066;
  *(undefined4 *)((long)puVar4 + 0x951c) = extraout_XMM0_Db_x01066;
  *(undefined4 *)(puVar4 + 0x12a4) = extraout_XMM0_Dc_x01066;
  *(undefined4 *)((long)puVar4 + 0x9524) = extraout_XMM0_Dd_x01066;
  puVar4[-0x346] = 0x900d9d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x12b2];
  *puVar1 = extraout_XMM0_Da_x01067;
  puVar1[1] = extraout_XMM0_Db_x01067;
  puVar1[2] = extraout_XMM0_Dc_x01067;
  puVar1[3] = extraout_XMM0_Dd_x01067;
  puVar4[-0x346] = 0x900dbd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x12aa];
  *puVar1 = extraout_XMM0_Da_x01068;
  puVar1[1] = extraout_XMM0_Db_x01068;
  puVar1[2] = extraout_XMM0_Dc_x01068;
  puVar1[3] = extraout_XMM0_Dd_x01068;
  puVar4[0x737] = puVar4[0x1df1];
  puVar4[0x738] = puVar4[0x1df2];
  puVar4[0x739] = puVar4[0x1def];
  puVar4[0x73a] = puVar4[0x1df0];
  puVar4[0x73b] = puVar4[0x1dfd];
  puVar4[0x73c] = puVar4[0x1dfe];
  puVar4[0x73d] = puVar4[0x1df9];
  puVar4[0x73e] = puVar4[0x1dfa];
  puVar4[0x73f] = puVar4[0x1df7];
  puVar4[0x740] = puVar4[0x1df8];
  puVar4[0x741] = puVar4[0x1df5];
  puVar4[0x742] = puVar4[0x1df6];
  puVar4[-0x346] = 0x900e34;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x900e41;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x12a1] = puVar4[0x737];
  puVar4[0x12a2] = puVar4[0x738];
  puVar4[0x129f] = puVar4[0x739];
  puVar4[0x12a0] = puVar4[0x73a];
  puVar4[0x129d] = puVar4[0x73b];
  puVar4[0x129e] = puVar4[0x73c];
  puVar4[0x129c] = puVar4[0xcf4];
  puVar4[0x1299] = puVar4[0x73d];
  puVar4[0x129a] = puVar4[0x73e];
  puVar4[0x1297] = puVar4[0x73f];
  puVar4[0x1298] = puVar4[0x740];
  puVar4[0x1295] = puVar4[0x741];
  puVar4[0x1296] = puVar4[0x742];
  puVar4[0x1294] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x1291) = extraout_XMM0_Da_x01069;
  *(undefined4 *)((long)puVar4 + 0x948c) = extraout_XMM0_Db_x01069;
  *(undefined4 *)(puVar4 + 0x1292) = extraout_XMM0_Dc_x01069;
  *(undefined4 *)((long)puVar4 + 0x9494) = extraout_XMM0_Dd_x01069;
  uVar2 = ((undefined8 *)puVar4[0x1294])[1];
  puVar4[0x745] = *(undefined8 *)puVar4[0x1294];
  puVar4[0x746] = uVar2;
  puVar4[-0x346] = 0x900ee9;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x743) = extraout_XMM0_Da_x01070;
  *(undefined4 *)((long)puVar4 + 0x3a1c) = extraout_XMM0_Db_x01070;
  *(undefined4 *)(puVar4 + 0x744) = extraout_XMM0_Dc_x01070;
  *(undefined4 *)((long)puVar4 + 0x3a24) = extraout_XMM0_Dd_x01070;
  puVar4[-0x346] = 0x900f0e;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x900f2e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x128f) = extraout_XMM0_Da_x01071;
  *(undefined4 *)((long)puVar4 + 0x947c) = extraout_XMM0_Db_x01071;
  *(undefined4 *)(puVar4 + 0x1290) = extraout_XMM0_Dc_x01071;
  *(undefined4 *)((long)puVar4 + 0x9484) = extraout_XMM0_Dd_x01071;
  puVar4[-0x346] = 0x900f43;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x747) = extraout_XMM0_Da_x01072;
  *(undefined4 *)((long)puVar4 + 0x3a3c) = extraout_XMM0_Db_x01072;
  *(undefined4 *)(puVar4 + 0x748) = extraout_XMM0_Dc_x01072;
  *(undefined4 *)((long)puVar4 + 0x3a44) = extraout_XMM0_Dd_x01072;
  puVar4[-0x346] = 0x900f68;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x900f78;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x128d) = extraout_XMM0_Da_x01073;
  *(undefined4 *)((long)puVar4 + 0x946c) = extraout_XMM0_Db_x01073;
  *(undefined4 *)(puVar4 + 0x128e) = extraout_XMM0_Dc_x01073;
  *(undefined4 *)((long)puVar4 + 0x9474) = extraout_XMM0_Dd_x01073;
  puVar4[-0x346] = 0x900f98;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x129c];
  *puVar1 = extraout_XMM0_Da_x01074;
  puVar1[1] = extraout_XMM0_Db_x01074;
  puVar1[2] = extraout_XMM0_Dc_x01074;
  puVar1[3] = extraout_XMM0_Dd_x01074;
  puVar4[-0x346] = 0x900fb8;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1294];
  *puVar1 = extraout_XMM0_Da_x01075;
  puVar1[1] = extraout_XMM0_Db_x01075;
  puVar1[2] = extraout_XMM0_Dc_x01075;
  puVar1[3] = extraout_XMM0_Dd_x01075;
  puVar4[0x74b] = puVar4[0x1df3];
  puVar4[0x74c] = puVar4[0x1df4];
  puVar4[0x74d] = puVar4[0x1df1];
  puVar4[0x74e] = puVar4[0x1df2];
  puVar4[0x74f] = puVar4[0x1def];
  puVar4[0x750] = puVar4[0x1df0];
  puVar4[0x751] = puVar4[0x1dfb];
  puVar4[0x752] = puVar4[0x1dfc];
  puVar4[0x753] = puVar4[0x1df9];
  puVar4[0x754] = puVar4[0x1dfa];
  puVar4[0x755] = puVar4[0x1df7];
  puVar4[0x756] = puVar4[0x1df8];
  puVar4[-0x346] = 0x90102f;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x90103c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x128b] = puVar4[0x74b];
  puVar4[0x128c] = puVar4[0x74c];
  puVar4[0x1289] = puVar4[0x74d];
  puVar4[0x128a] = puVar4[0x74e];
  puVar4[0x1287] = puVar4[0x74f];
  puVar4[0x1288] = puVar4[0x750];
  puVar4[0x1286] = puVar4[0xd14];
  puVar4[0x1283] = puVar4[0x751];
  puVar4[0x1284] = puVar4[0x752];
  puVar4[0x1281] = puVar4[0x753];
  puVar4[0x1282] = puVar4[0x754];
  puVar4[0x127f] = puVar4[0x755];
  puVar4[0x1280] = puVar4[0x756];
  puVar4[0x127e] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x127b) = extraout_XMM0_Da_x01076;
  *(undefined4 *)((long)puVar4 + 0x93dc) = extraout_XMM0_Db_x01076;
  *(undefined4 *)(puVar4 + 0x127c) = extraout_XMM0_Dc_x01076;
  *(undefined4 *)((long)puVar4 + 0x93e4) = extraout_XMM0_Dd_x01076;
  uVar2 = ((undefined8 *)puVar4[0x127e])[1];
  puVar4[0x759] = *(undefined8 *)puVar4[0x127e];
  puVar4[0x75a] = uVar2;
  puVar4[-0x346] = 0x9010e4;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x757) = extraout_XMM0_Da_x01077;
  *(undefined4 *)((long)puVar4 + 0x3abc) = extraout_XMM0_Db_x01077;
  *(undefined4 *)(puVar4 + 0x758) = extraout_XMM0_Dc_x01077;
  *(undefined4 *)((long)puVar4 + 0x3ac4) = extraout_XMM0_Dd_x01077;
  puVar4[-0x346] = 0x901109;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x901129;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1279) = extraout_XMM0_Da_x01078;
  *(undefined4 *)((long)puVar4 + 0x93cc) = extraout_XMM0_Db_x01078;
  *(undefined4 *)(puVar4 + 0x127a) = extraout_XMM0_Dc_x01078;
  *(undefined4 *)((long)puVar4 + 0x93d4) = extraout_XMM0_Dd_x01078;
  puVar4[-0x346] = 0x90113e;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x75b) = extraout_XMM0_Da_x01079;
  *(undefined4 *)((long)puVar4 + 0x3adc) = extraout_XMM0_Db_x01079;
  *(undefined4 *)(puVar4 + 0x75c) = extraout_XMM0_Dc_x01079;
  *(undefined4 *)((long)puVar4 + 0x3ae4) = extraout_XMM0_Dd_x01079;
  puVar4[-0x346] = 0x901163;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x901173;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1277) = extraout_XMM0_Da_x01080;
  *(undefined4 *)((long)puVar4 + 0x93bc) = extraout_XMM0_Db_x01080;
  *(undefined4 *)(puVar4 + 0x1278) = extraout_XMM0_Dc_x01080;
  *(undefined4 *)((long)puVar4 + 0x93c4) = extraout_XMM0_Dd_x01080;
  puVar4[-0x346] = 0x901193;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1286];
  *puVar1 = extraout_XMM0_Da_x01081;
  puVar1[1] = extraout_XMM0_Db_x01081;
  puVar1[2] = extraout_XMM0_Dc_x01081;
  puVar1[3] = extraout_XMM0_Dd_x01081;
  puVar4[-0x346] = 0x9011b3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x127e];
  *puVar1 = extraout_XMM0_Da_x01082;
  puVar1[1] = extraout_XMM0_Db_x01082;
  puVar1[2] = extraout_XMM0_Dc_x01082;
  puVar1[3] = extraout_XMM0_Dd_x01082;
  puVar4[0x75f] = puVar4[0x1df5];
  puVar4[0x760] = puVar4[0x1df6];
  puVar4[0x761] = puVar4[0x1df3];
  puVar4[0x762] = puVar4[0x1df4];
  puVar4[0x763] = puVar4[0x1df1];
  puVar4[0x764] = puVar4[0x1df2];
  puVar4[0x765] = puVar4[0x1dfd];
  puVar4[0x766] = puVar4[0x1dfe];
  puVar4[0x767] = puVar4[0x1dfb];
  puVar4[0x768] = puVar4[0x1dfc];
  puVar4[0x769] = puVar4[0x1df9];
  puVar4[0x76a] = puVar4[0x1dfa];
  puVar4[-0x346] = 0x90122a;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x901237;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1275] = puVar4[0x75f];
  puVar4[0x1276] = puVar4[0x760];
  puVar4[0x1273] = puVar4[0x761];
  puVar4[0x1274] = puVar4[0x762];
  puVar4[0x1271] = puVar4[0x763];
  puVar4[0x1272] = puVar4[0x764];
  puVar4[0x1270] = puVar4[0xcae];
  puVar4[0x126d] = puVar4[0x765];
  puVar4[0x126e] = puVar4[0x766];
  puVar4[0x126b] = puVar4[0x767];
  puVar4[0x126c] = puVar4[0x768];
  puVar4[0x1269] = puVar4[0x769];
  puVar4[0x126a] = puVar4[0x76a];
  puVar4[0x1268] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x1265) = extraout_XMM0_Da_x01083;
  *(undefined4 *)((long)puVar4 + 0x932c) = extraout_XMM0_Db_x01083;
  *(undefined4 *)(puVar4 + 0x1266) = extraout_XMM0_Dc_x01083;
  *(undefined4 *)((long)puVar4 + 0x9334) = extraout_XMM0_Dd_x01083;
  uVar2 = ((undefined8 *)puVar4[0x1268])[1];
  puVar4[0x76d] = *(undefined8 *)puVar4[0x1268];
  puVar4[0x76e] = uVar2;
  puVar4[-0x346] = 0x9012df;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x76b) = extraout_XMM0_Da_x01084;
  *(undefined4 *)((long)puVar4 + 0x3b5c) = extraout_XMM0_Db_x01084;
  *(undefined4 *)(puVar4 + 0x76c) = extraout_XMM0_Dc_x01084;
  *(undefined4 *)((long)puVar4 + 0x3b64) = extraout_XMM0_Dd_x01084;
  puVar4[-0x346] = 0x901304;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x901324;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1263) = extraout_XMM0_Da_x01085;
  *(undefined4 *)((long)puVar4 + 0x931c) = extraout_XMM0_Db_x01085;
  *(undefined4 *)(puVar4 + 0x1264) = extraout_XMM0_Dc_x01085;
  *(undefined4 *)((long)puVar4 + 0x9324) = extraout_XMM0_Dd_x01085;
  puVar4[-0x346] = 0x901339;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x76f) = extraout_XMM0_Da_x01086;
  *(undefined4 *)((long)puVar4 + 0x3b7c) = extraout_XMM0_Db_x01086;
  *(undefined4 *)(puVar4 + 0x770) = extraout_XMM0_Dc_x01086;
  *(undefined4 *)((long)puVar4 + 0x3b84) = extraout_XMM0_Dd_x01086;
  puVar4[-0x346] = 0x90135e;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90136e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1261) = extraout_XMM0_Da_x01087;
  *(undefined4 *)((long)puVar4 + 0x930c) = extraout_XMM0_Db_x01087;
  *(undefined4 *)(puVar4 + 0x1262) = extraout_XMM0_Dc_x01087;
  *(undefined4 *)((long)puVar4 + 0x9314) = extraout_XMM0_Dd_x01087;
  puVar4[-0x346] = 0x90138e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1270];
  *puVar1 = extraout_XMM0_Da_x01088;
  puVar1[1] = extraout_XMM0_Db_x01088;
  puVar1[2] = extraout_XMM0_Dc_x01088;
  puVar1[3] = extraout_XMM0_Dd_x01088;
  puVar4[-0x346] = 0x9013ae;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1268];
  *puVar1 = extraout_XMM0_Da_x01089;
  puVar1[1] = extraout_XMM0_Db_x01089;
  puVar1[2] = extraout_XMM0_Dc_x01089;
  puVar1[3] = extraout_XMM0_Dd_x01089;
  puVar4[0x773] = puVar4[0x1df7];
  puVar4[0x774] = puVar4[0x1df8];
  puVar4[0x775] = puVar4[0x1df5];
  puVar4[0x776] = puVar4[0x1df6];
  puVar4[0x777] = puVar4[0x1df3];
  puVar4[0x778] = puVar4[0x1df4];
  puVar4[0x779] = puVar4[0x1def];
  puVar4[0x77a] = puVar4[0x1df0];
  puVar4[0x77b] = puVar4[0x1dfd];
  puVar4[0x77c] = puVar4[0x1dfe];
  puVar4[0x77d] = puVar4[0x1dfb];
  puVar4[0x77e] = puVar4[0x1dfc];
  puVar4[-0x346] = 0x901425;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x901432;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x125f] = puVar4[0x773];
  puVar4[0x1260] = puVar4[0x774];
  puVar4[0x125d] = puVar4[0x775];
  puVar4[0x125e] = puVar4[0x776];
  puVar4[0x125b] = puVar4[0x777];
  puVar4[0x125c] = puVar4[0x778];
  puVar4[0x125a] = puVar4[0xccc];
  puVar4[0x1257] = puVar4[0x779];
  puVar4[0x1258] = puVar4[0x77a];
  puVar4[0x1255] = puVar4[0x77b];
  puVar4[0x1256] = puVar4[0x77c];
  puVar4[0x1253] = puVar4[0x77d];
  puVar4[0x1254] = puVar4[0x77e];
  puVar4[0x1252] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x124f) = extraout_XMM0_Da_x01090;
  *(undefined4 *)((long)puVar4 + 0x927c) = extraout_XMM0_Db_x01090;
  *(undefined4 *)(puVar4 + 0x1250) = extraout_XMM0_Dc_x01090;
  *(undefined4 *)((long)puVar4 + 0x9284) = extraout_XMM0_Dd_x01090;
  uVar2 = ((undefined8 *)puVar4[0x1252])[1];
  puVar4[0x781] = *(undefined8 *)puVar4[0x1252];
  puVar4[0x782] = uVar2;
  puVar4[-0x346] = 0x9014da;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x77f) = extraout_XMM0_Da_x01091;
  *(undefined4 *)((long)puVar4 + 0x3bfc) = extraout_XMM0_Db_x01091;
  *(undefined4 *)(puVar4 + 0x780) = extraout_XMM0_Dc_x01091;
  *(undefined4 *)((long)puVar4 + 0x3c04) = extraout_XMM0_Dd_x01091;
  puVar4[-0x346] = 0x9014ff;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90151f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x124d) = extraout_XMM0_Da_x01092;
  *(undefined4 *)((long)puVar4 + 0x926c) = extraout_XMM0_Db_x01092;
  *(undefined4 *)(puVar4 + 0x124e) = extraout_XMM0_Dc_x01092;
  *(undefined4 *)((long)puVar4 + 0x9274) = extraout_XMM0_Dd_x01092;
  puVar4[-0x346] = 0x901534;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x783) = extraout_XMM0_Da_x01093;
  *(undefined4 *)((long)puVar4 + 0x3c1c) = extraout_XMM0_Db_x01093;
  *(undefined4 *)(puVar4 + 0x784) = extraout_XMM0_Dc_x01093;
  *(undefined4 *)((long)puVar4 + 0x3c24) = extraout_XMM0_Dd_x01093;
  puVar4[-0x346] = 0x901559;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x901569;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x124b) = extraout_XMM0_Da_x01094;
  *(undefined4 *)((long)puVar4 + 0x925c) = extraout_XMM0_Db_x01094;
  *(undefined4 *)(puVar4 + 0x124c) = extraout_XMM0_Dc_x01094;
  *(undefined4 *)((long)puVar4 + 0x9264) = extraout_XMM0_Dd_x01094;
  puVar4[-0x346] = 0x901589;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x125a];
  *puVar1 = extraout_XMM0_Da_x01095;
  puVar1[1] = extraout_XMM0_Db_x01095;
  puVar1[2] = extraout_XMM0_Dc_x01095;
  puVar1[3] = extraout_XMM0_Dd_x01095;
  puVar4[-0x346] = 0x9015a9;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1252];
  *puVar1 = extraout_XMM0_Da_x01096;
  puVar1[1] = extraout_XMM0_Db_x01096;
  puVar1[2] = extraout_XMM0_Dc_x01096;
  puVar1[3] = extraout_XMM0_Dd_x01096;
  puVar4[0x787] = puVar4[0x1df9];
  puVar4[0x788] = puVar4[0x1dfa];
  puVar4[0x789] = puVar4[0x1df7];
  puVar4[0x78a] = puVar4[0x1df8];
  puVar4[0x78b] = puVar4[0x1df5];
  puVar4[0x78c] = puVar4[0x1df6];
  puVar4[0x78d] = puVar4[0x1df1];
  puVar4[0x78e] = puVar4[0x1df2];
  puVar4[0x78f] = puVar4[0x1def];
  puVar4[0x790] = puVar4[0x1df0];
  puVar4[0x791] = puVar4[0x1dfd];
  puVar4[0x792] = puVar4[0x1dfe];
  puVar4[-0x346] = 0x901620;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x90162d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1249] = puVar4[0x787];
  puVar4[0x124a] = puVar4[0x788];
  puVar4[0x1247] = puVar4[0x789];
  puVar4[0x1248] = puVar4[0x78a];
  puVar4[0x1245] = puVar4[0x78b];
  puVar4[0x1246] = puVar4[0x78c];
  puVar4[0x1244] = puVar4[0xcec];
  puVar4[0x1241] = puVar4[0x78d];
  puVar4[0x1242] = puVar4[0x78e];
  puVar4[0x123f] = puVar4[0x78f];
  puVar4[0x1240] = puVar4[0x790];
  puVar4[0x123d] = puVar4[0x791];
  puVar4[0x123e] = puVar4[0x792];
  puVar4[0x123c] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x1239) = extraout_XMM0_Da_x01097;
  *(undefined4 *)((long)puVar4 + 0x91cc) = extraout_XMM0_Db_x01097;
  *(undefined4 *)(puVar4 + 0x123a) = extraout_XMM0_Dc_x01097;
  *(undefined4 *)((long)puVar4 + 0x91d4) = extraout_XMM0_Dd_x01097;
  uVar2 = ((undefined8 *)puVar4[0x123c])[1];
  puVar4[0x795] = *(undefined8 *)puVar4[0x123c];
  puVar4[0x796] = uVar2;
  puVar4[-0x346] = 0x9016d5;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x793) = extraout_XMM0_Da_x01098;
  *(undefined4 *)((long)puVar4 + 0x3c9c) = extraout_XMM0_Db_x01098;
  *(undefined4 *)(puVar4 + 0x794) = extraout_XMM0_Dc_x01098;
  *(undefined4 *)((long)puVar4 + 0x3ca4) = extraout_XMM0_Dd_x01098;
  puVar4[-0x346] = 0x9016fa;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90171a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1237) = extraout_XMM0_Da_x01099;
  *(undefined4 *)((long)puVar4 + 0x91bc) = extraout_XMM0_Db_x01099;
  *(undefined4 *)(puVar4 + 0x1238) = extraout_XMM0_Dc_x01099;
  *(undefined4 *)((long)puVar4 + 0x91c4) = extraout_XMM0_Dd_x01099;
  puVar4[-0x346] = 0x90172f;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x797) = extraout_XMM0_Da_x01100;
  *(undefined4 *)((long)puVar4 + 0x3cbc) = extraout_XMM0_Db_x01100;
  *(undefined4 *)(puVar4 + 0x798) = extraout_XMM0_Dc_x01100;
  *(undefined4 *)((long)puVar4 + 0x3cc4) = extraout_XMM0_Dd_x01100;
  puVar4[-0x346] = 0x901754;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x901764;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1235) = extraout_XMM0_Da_x01101;
  *(undefined4 *)((long)puVar4 + 0x91ac) = extraout_XMM0_Db_x01101;
  *(undefined4 *)(puVar4 + 0x1236) = extraout_XMM0_Dc_x01101;
  *(undefined4 *)((long)puVar4 + 0x91b4) = extraout_XMM0_Dd_x01101;
  puVar4[-0x346] = 0x901784;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1244];
  *puVar1 = extraout_XMM0_Da_x01102;
  puVar1[1] = extraout_XMM0_Db_x01102;
  puVar1[2] = extraout_XMM0_Dc_x01102;
  puVar1[3] = extraout_XMM0_Dd_x01102;
  puVar4[-0x346] = 0x9017a4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x123c];
  *puVar1 = extraout_XMM0_Da_x01103;
  puVar1[1] = extraout_XMM0_Db_x01103;
  puVar1[2] = extraout_XMM0_Dc_x01103;
  puVar1[3] = extraout_XMM0_Dd_x01103;
  puVar4[0x79b] = puVar4[0x1dfb];
  puVar4[0x79c] = puVar4[0x1dfc];
  puVar4[0x79d] = puVar4[0x1df9];
  puVar4[0x79e] = puVar4[0x1dfa];
  puVar4[0x79f] = puVar4[0x1df7];
  puVar4[0x7a0] = puVar4[0x1df8];
  puVar4[0x7a1] = puVar4[0x1df3];
  puVar4[0x7a2] = puVar4[0x1df4];
  puVar4[0x7a3] = puVar4[0x1df1];
  puVar4[0x7a4] = puVar4[0x1df2];
  puVar4[0x7a5] = puVar4[0x1def];
  puVar4[0x7a6] = puVar4[0x1df0];
  puVar4[-0x346] = 0x90181b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x901828;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1233] = puVar4[0x79b];
  puVar4[0x1234] = puVar4[0x79c];
  puVar4[0x1231] = puVar4[0x79d];
  puVar4[0x1232] = puVar4[0x79e];
  puVar4[0x122f] = puVar4[0x79f];
  puVar4[0x1230] = puVar4[0x7a0];
  puVar4[0x122e] = puVar4[0xd0c];
  puVar4[0x122b] = puVar4[0x7a1];
  puVar4[0x122c] = puVar4[0x7a2];
  puVar4[0x1229] = puVar4[0x7a3];
  puVar4[0x122a] = puVar4[0x7a4];
  puVar4[0x1227] = puVar4[0x7a5];
  puVar4[0x1228] = puVar4[0x7a6];
  puVar4[0x1226] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x1223) = extraout_XMM0_Da_x01104;
  *(undefined4 *)((long)puVar4 + 0x911c) = extraout_XMM0_Db_x01104;
  *(undefined4 *)(puVar4 + 0x1224) = extraout_XMM0_Dc_x01104;
  *(undefined4 *)((long)puVar4 + 0x9124) = extraout_XMM0_Dd_x01104;
  uVar2 = ((undefined8 *)puVar4[0x1226])[1];
  puVar4[0x7a9] = *(undefined8 *)puVar4[0x1226];
  puVar4[0x7aa] = uVar2;
  puVar4[-0x346] = 0x9018d0;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x7a7) = extraout_XMM0_Da_x01105;
  *(undefined4 *)((long)puVar4 + 0x3d3c) = extraout_XMM0_Db_x01105;
  *(undefined4 *)(puVar4 + 0x7a8) = extraout_XMM0_Dc_x01105;
  *(undefined4 *)((long)puVar4 + 0x3d44) = extraout_XMM0_Dd_x01105;
  puVar4[-0x346] = 0x9018f5;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x901915;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1221) = extraout_XMM0_Da_x01106;
  *(undefined4 *)((long)puVar4 + 0x910c) = extraout_XMM0_Db_x01106;
  *(undefined4 *)(puVar4 + 0x1222) = extraout_XMM0_Dc_x01106;
  *(undefined4 *)((long)puVar4 + 0x9114) = extraout_XMM0_Dd_x01106;
  puVar4[-0x346] = 0x90192a;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x7ab) = extraout_XMM0_Da_x01107;
  *(undefined4 *)((long)puVar4 + 0x3d5c) = extraout_XMM0_Db_x01107;
  *(undefined4 *)(puVar4 + 0x7ac) = extraout_XMM0_Dc_x01107;
  *(undefined4 *)((long)puVar4 + 0x3d64) = extraout_XMM0_Dd_x01107;
  puVar4[-0x346] = 0x90194f;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90195f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x121f) = extraout_XMM0_Da_x01108;
  *(undefined4 *)((long)puVar4 + 0x90fc) = extraout_XMM0_Db_x01108;
  *(undefined4 *)(puVar4 + 0x1220) = extraout_XMM0_Dc_x01108;
  *(undefined4 *)((long)puVar4 + 0x9104) = extraout_XMM0_Dd_x01108;
  puVar4[-0x346] = 0x90197f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x122e];
  *puVar1 = extraout_XMM0_Da_x01109;
  puVar1[1] = extraout_XMM0_Db_x01109;
  puVar1[2] = extraout_XMM0_Dc_x01109;
  puVar1[3] = extraout_XMM0_Dd_x01109;
  puVar4[-0x346] = 0x90199f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1226];
  *puVar1 = extraout_XMM0_Da_x01110;
  puVar1[1] = extraout_XMM0_Db_x01110;
  puVar1[2] = extraout_XMM0_Dc_x01110;
  puVar1[3] = extraout_XMM0_Dd_x01110;
  puVar4[0x7ad] = puVar4[0x1dfd];
  puVar4[0x7ae] = puVar4[0x1dfe];
  puVar4[0x7af] = puVar4[0x1dfb];
  puVar4[0x7b0] = puVar4[0x1dfc];
  puVar4[0x7b1] = puVar4[0x1df9];
  puVar4[0x7b2] = puVar4[0x1dfa];
  puVar4[0x7b3] = puVar4[0x1df5];
  puVar4[0x7b4] = puVar4[0x1df6];
  puVar4[0x7b5] = puVar4[0x1df3];
  puVar4[0x7b6] = puVar4[0x1df4];
  puVar4[0x7b7] = puVar4[0x1df1];
  puVar4[0x7b8] = puVar4[0x1df2];
  puVar4[-0x346] = 0x901a14;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x121d] = puVar4[0x7ad];
  puVar4[0x121e] = puVar4[0x7ae];
  puVar4[0x121b] = puVar4[0x7af];
  puVar4[0x121c] = puVar4[0x7b0];
  puVar4[0x1219] = puVar4[0x7b1];
  puVar4[0x121a] = puVar4[0x7b2];
  puVar4[0x1218] = puVar4[0xcb6];
  puVar4[0x1215] = puVar4[0x7b3];
  puVar4[0x1216] = puVar4[0x7b4];
  puVar4[0x1213] = puVar4[0x7b5];
  puVar4[0x1214] = puVar4[0x7b6];
  puVar4[0x1211] = puVar4[0x7b7];
  puVar4[0x1212] = puVar4[0x7b8];
  puVar4[0x1210] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x120d) = extraout_XMM0_Da_x01111;
  *(undefined4 *)((long)puVar4 + 0x906c) = extraout_XMM0_Db_x01111;
  *(undefined4 *)(puVar4 + 0x120e) = extraout_XMM0_Dc_x01111;
  *(undefined4 *)((long)puVar4 + 0x9074) = extraout_XMM0_Dd_x01111;
  uVar2 = ((undefined8 *)puVar4[0x1210])[1];
  puVar4[0x7bb] = *(undefined8 *)puVar4[0x1210];
  puVar4[0x7bc] = uVar2;
  puVar4[-0x346] = 0x901abc;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x7b9) = extraout_XMM0_Da_x01112;
  *(undefined4 *)((long)puVar4 + 0x3dcc) = extraout_XMM0_Db_x01112;
  *(undefined4 *)(puVar4 + 0x7ba) = extraout_XMM0_Dc_x01112;
  *(undefined4 *)((long)puVar4 + 0x3dd4) = extraout_XMM0_Dd_x01112;
  puVar4[-0x346] = 0x901ae1;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x901b01;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x120b) = extraout_XMM0_Da_x01113;
  *(undefined4 *)((long)puVar4 + 0x905c) = extraout_XMM0_Db_x01113;
  *(undefined4 *)(puVar4 + 0x120c) = extraout_XMM0_Dc_x01113;
  *(undefined4 *)((long)puVar4 + 0x9064) = extraout_XMM0_Dd_x01113;
  puVar4[-0x346] = 0x901b16;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x7bd) = extraout_XMM0_Da_x01114;
  *(undefined4 *)((long)puVar4 + 0x3dec) = extraout_XMM0_Db_x01114;
  *(undefined4 *)(puVar4 + 0x7be) = extraout_XMM0_Dc_x01114;
  *(undefined4 *)((long)puVar4 + 0x3df4) = extraout_XMM0_Dd_x01114;
  puVar4[-0x346] = 0x901b3b;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x901b4b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1209) = extraout_XMM0_Da_x01115;
  *(undefined4 *)((long)puVar4 + 0x904c) = extraout_XMM0_Db_x01115;
  *(undefined4 *)(puVar4 + 0x120a) = extraout_XMM0_Dc_x01115;
  *(undefined4 *)((long)puVar4 + 0x9054) = extraout_XMM0_Dd_x01115;
  puVar4[-0x346] = 0x901b6b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1218];
  *puVar1 = extraout_XMM0_Da_x01116;
  puVar1[1] = extraout_XMM0_Db_x01116;
  puVar1[2] = extraout_XMM0_Dc_x01116;
  puVar1[3] = extraout_XMM0_Dd_x01116;
  puVar4[-0x346] = 0x901b8b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1210];
  *puVar1 = extraout_XMM0_Da_x01117;
  puVar1[1] = extraout_XMM0_Db_x01117;
  puVar1[2] = extraout_XMM0_Dc_x01117;
  puVar1[3] = extraout_XMM0_Dd_x01117;
  puVar4[0x7c1] = puVar4[0x1def];
  puVar4[0x7c2] = puVar4[0x1df0];
  puVar4[0x7c3] = puVar4[0x1dfd];
  puVar4[0x7c4] = puVar4[0x1dfe];
  puVar4[0x7c5] = puVar4[0x1dfb];
  puVar4[0x7c6] = puVar4[0x1dfc];
  puVar4[0x7c7] = puVar4[0x1df7];
  puVar4[0x7c8] = puVar4[0x1df8];
  puVar4[0x7c9] = puVar4[0x1df5];
  puVar4[0x7ca] = puVar4[0x1df6];
  puVar4[0x7cb] = puVar4[0x1df3];
  puVar4[0x7cc] = puVar4[0x1df4];
  puVar4[-0x346] = 0x901c02;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1207] = puVar4[0x7c1];
  puVar4[0x1208] = puVar4[0x7c2];
  puVar4[0x1205] = puVar4[0x7c3];
  puVar4[0x1206] = puVar4[0x7c4];
  puVar4[0x1203] = puVar4[0x7c5];
  puVar4[0x1204] = puVar4[0x7c6];
  puVar4[0x1202] = puVar4[0xcd4];
  puVar4[0x11ff] = puVar4[0x7c7];
  puVar4[0x1200] = puVar4[0x7c8];
  puVar4[0x11fd] = puVar4[0x7c9];
  puVar4[0x11fe] = puVar4[0x7ca];
  puVar4[0x11fb] = puVar4[0x7cb];
  puVar4[0x11fc] = puVar4[0x7cc];
  puVar4[0x11fa] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x11f7) = extraout_XMM0_Da_x01118;
  *(undefined4 *)((long)puVar4 + 0x8fbc) = extraout_XMM0_Db_x01118;
  *(undefined4 *)(puVar4 + 0x11f8) = extraout_XMM0_Dc_x01118;
  *(undefined4 *)((long)puVar4 + 0x8fc4) = extraout_XMM0_Dd_x01118;
  uVar2 = ((undefined8 *)puVar4[0x11fa])[1];
  puVar4[1999] = *(undefined8 *)puVar4[0x11fa];
  puVar4[2000] = uVar2;
  puVar4[-0x346] = 0x901caa;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x7cd) = extraout_XMM0_Da_x01119;
  *(undefined4 *)((long)puVar4 + 0x3e6c) = extraout_XMM0_Db_x01119;
  *(undefined4 *)(puVar4 + 0x7ce) = extraout_XMM0_Dc_x01119;
  *(undefined4 *)((long)puVar4 + 0x3e74) = extraout_XMM0_Dd_x01119;
  puVar4[-0x346] = 0x901ccf;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x901cef;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x11f5) = extraout_XMM0_Da_x01120;
  *(undefined4 *)((long)puVar4 + 0x8fac) = extraout_XMM0_Db_x01120;
  *(undefined4 *)(puVar4 + 0x11f6) = extraout_XMM0_Dc_x01120;
  *(undefined4 *)((long)puVar4 + 0x8fb4) = extraout_XMM0_Dd_x01120;
  puVar4[-0x346] = 0x901d04;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x7d1) = extraout_XMM0_Da_x01121;
  *(undefined4 *)((long)puVar4 + 0x3e8c) = extraout_XMM0_Db_x01121;
  *(undefined4 *)(puVar4 + 0x7d2) = extraout_XMM0_Dc_x01121;
  *(undefined4 *)((long)puVar4 + 0x3e94) = extraout_XMM0_Dd_x01121;
  puVar4[-0x346] = 0x901d29;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x901d39;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x11f3) = extraout_XMM0_Da_x01122;
  *(undefined4 *)((long)puVar4 + 0x8f9c) = extraout_XMM0_Db_x01122;
  *(undefined4 *)(puVar4 + 0x11f4) = extraout_XMM0_Dc_x01122;
  *(undefined4 *)((long)puVar4 + 0x8fa4) = extraout_XMM0_Dd_x01122;
  puVar4[-0x346] = 0x901d59;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1202];
  *puVar1 = extraout_XMM0_Da_x01123;
  puVar1[1] = extraout_XMM0_Db_x01123;
  puVar1[2] = extraout_XMM0_Dc_x01123;
  puVar1[3] = extraout_XMM0_Dd_x01123;
  puVar4[-0x346] = 0x901d79;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x11fa];
  *puVar1 = extraout_XMM0_Da_x01124;
  puVar1[1] = extraout_XMM0_Db_x01124;
  puVar1[2] = extraout_XMM0_Dc_x01124;
  puVar1[3] = extraout_XMM0_Dd_x01124;
  puVar4[0x7d5] = puVar4[0x1df1];
  puVar4[0x7d6] = puVar4[0x1df2];
  puVar4[0x7d7] = puVar4[0x1def];
  puVar4[0x7d8] = puVar4[0x1df0];
  puVar4[0x7d9] = puVar4[0x1dfd];
  puVar4[0x7da] = puVar4[0x1dfe];
  puVar4[0x7db] = puVar4[0x1df9];
  puVar4[0x7dc] = puVar4[0x1dfa];
  puVar4[0x7dd] = puVar4[0x1df7];
  puVar4[0x7de] = puVar4[0x1df8];
  puVar4[0x7df] = puVar4[0x1df5];
  puVar4[0x7e0] = puVar4[0x1df6];
  puVar4[-0x346] = 0x901df0;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x11f1] = puVar4[0x7d5];
  puVar4[0x11f2] = puVar4[0x7d6];
  puVar4[0x11ef] = puVar4[0x7d7];
  puVar4[0x11f0] = puVar4[0x7d8];
  puVar4[0x11ed] = puVar4[0x7d9];
  puVar4[0x11ee] = puVar4[0x7da];
  puVar4[0x11ec] = puVar4[0xcf4];
  puVar4[0x11e9] = puVar4[0x7db];
  puVar4[0x11ea] = puVar4[0x7dc];
  puVar4[0x11e7] = puVar4[0x7dd];
  puVar4[0x11e8] = puVar4[0x7de];
  puVar4[0x11e5] = puVar4[0x7df];
  puVar4[0x11e6] = puVar4[0x7e0];
  puVar4[0x11e4] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x11e1) = extraout_XMM0_Da_x01125;
  *(undefined4 *)((long)puVar4 + 0x8f0c) = extraout_XMM0_Db_x01125;
  *(undefined4 *)(puVar4 + 0x11e2) = extraout_XMM0_Dc_x01125;
  *(undefined4 *)((long)puVar4 + 0x8f14) = extraout_XMM0_Dd_x01125;
  uVar2 = ((undefined8 *)puVar4[0x11e4])[1];
  puVar4[0x7e3] = *(undefined8 *)puVar4[0x11e4];
  puVar4[0x7e4] = uVar2;
  puVar4[-0x346] = 0x901e98;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x7e1) = extraout_XMM0_Da_x01126;
  *(undefined4 *)((long)puVar4 + 0x3f0c) = extraout_XMM0_Db_x01126;
  *(undefined4 *)(puVar4 + 0x7e2) = extraout_XMM0_Dc_x01126;
  *(undefined4 *)((long)puVar4 + 0x3f14) = extraout_XMM0_Dd_x01126;
  puVar4[-0x346] = 0x901ebd;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x901edd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x11df) = extraout_XMM0_Da_x01127;
  *(undefined4 *)((long)puVar4 + 0x8efc) = extraout_XMM0_Db_x01127;
  *(undefined4 *)(puVar4 + 0x11e0) = extraout_XMM0_Dc_x01127;
  *(undefined4 *)((long)puVar4 + 0x8f04) = extraout_XMM0_Dd_x01127;
  puVar4[-0x346] = 0x901ef2;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x7e5) = extraout_XMM0_Da_x01128;
  *(undefined4 *)((long)puVar4 + 0x3f2c) = extraout_XMM0_Db_x01128;
  *(undefined4 *)(puVar4 + 0x7e6) = extraout_XMM0_Dc_x01128;
  *(undefined4 *)((long)puVar4 + 0x3f34) = extraout_XMM0_Dd_x01128;
  puVar4[-0x346] = 0x901f17;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x901f27;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x11dd) = extraout_XMM0_Da_x01129;
  *(undefined4 *)((long)puVar4 + 0x8eec) = extraout_XMM0_Db_x01129;
  *(undefined4 *)(puVar4 + 0x11de) = extraout_XMM0_Dc_x01129;
  *(undefined4 *)((long)puVar4 + 0x8ef4) = extraout_XMM0_Dd_x01129;
  puVar4[-0x346] = 0x901f47;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x11ec];
  *puVar1 = extraout_XMM0_Da_x01130;
  puVar1[1] = extraout_XMM0_Db_x01130;
  puVar1[2] = extraout_XMM0_Dc_x01130;
  puVar1[3] = extraout_XMM0_Dd_x01130;
  puVar4[-0x346] = 0x901f67;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x11e4];
  *puVar1 = extraout_XMM0_Da_x01131;
  puVar1[1] = extraout_XMM0_Db_x01131;
  puVar1[2] = extraout_XMM0_Dc_x01131;
  puVar1[3] = extraout_XMM0_Dd_x01131;
  puVar4[0x7e9] = puVar4[0x1df3];
  puVar4[0x7ea] = puVar4[0x1df4];
  puVar4[0x7eb] = puVar4[0x1df1];
  puVar4[0x7ec] = puVar4[0x1df2];
  puVar4[0x7ed] = puVar4[0x1def];
  puVar4[0x7ee] = puVar4[0x1df0];
  puVar4[0x7ef] = puVar4[0x1dfb];
  puVar4[0x7f0] = puVar4[0x1dfc];
  puVar4[0x7f1] = puVar4[0x1df9];
  puVar4[0x7f2] = puVar4[0x1dfa];
  puVar4[0x7f3] = puVar4[0x1df7];
  puVar4[0x7f4] = puVar4[0x1df8];
  puVar4[-0x346] = 0x901fde;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x11db] = puVar4[0x7e9];
  puVar4[0x11dc] = puVar4[0x7ea];
  puVar4[0x11d9] = puVar4[0x7eb];
  puVar4[0x11da] = puVar4[0x7ec];
  puVar4[0x11d7] = puVar4[0x7ed];
  puVar4[0x11d8] = puVar4[0x7ee];
  puVar4[0x11d6] = puVar4[0xd14];
  puVar4[0x11d3] = puVar4[0x7ef];
  puVar4[0x11d4] = puVar4[0x7f0];
  puVar4[0x11d1] = puVar4[0x7f1];
  puVar4[0x11d2] = puVar4[0x7f2];
  puVar4[0x11cf] = puVar4[0x7f3];
  puVar4[0x11d0] = puVar4[0x7f4];
  puVar4[0x11ce] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x11cb) = extraout_XMM0_Da_x01132;
  *(undefined4 *)((long)puVar4 + 0x8e5c) = extraout_XMM0_Db_x01132;
  *(undefined4 *)(puVar4 + 0x11cc) = extraout_XMM0_Dc_x01132;
  *(undefined4 *)((long)puVar4 + 0x8e64) = extraout_XMM0_Dd_x01132;
  uVar2 = ((undefined8 *)puVar4[0x11ce])[1];
  puVar4[0x7f7] = *(undefined8 *)puVar4[0x11ce];
  puVar4[0x7f8] = uVar2;
  puVar4[-0x346] = 0x902086;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x7f5) = extraout_XMM0_Da_x01133;
  *(undefined4 *)((long)puVar4 + 0x3fac) = extraout_XMM0_Db_x01133;
  *(undefined4 *)(puVar4 + 0x7f6) = extraout_XMM0_Dc_x01133;
  *(undefined4 *)((long)puVar4 + 0x3fb4) = extraout_XMM0_Dd_x01133;
  puVar4[-0x346] = 0x9020ab;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9020cb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x11c9) = extraout_XMM0_Da_x01134;
  *(undefined4 *)((long)puVar4 + 0x8e4c) = extraout_XMM0_Db_x01134;
  *(undefined4 *)(puVar4 + 0x11ca) = extraout_XMM0_Dc_x01134;
  *(undefined4 *)((long)puVar4 + 0x8e54) = extraout_XMM0_Dd_x01134;
  puVar4[-0x346] = 0x9020e0;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x7f9) = extraout_XMM0_Da_x01135;
  *(undefined4 *)((long)puVar4 + 0x3fcc) = extraout_XMM0_Db_x01135;
  *(undefined4 *)(puVar4 + 0x7fa) = extraout_XMM0_Dc_x01135;
  *(undefined4 *)((long)puVar4 + 0x3fd4) = extraout_XMM0_Dd_x01135;
  puVar4[-0x346] = 0x902105;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x902115;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x11c7) = extraout_XMM0_Da_x01136;
  *(undefined4 *)((long)puVar4 + 0x8e3c) = extraout_XMM0_Db_x01136;
  *(undefined4 *)(puVar4 + 0x11c8) = extraout_XMM0_Dc_x01136;
  *(undefined4 *)((long)puVar4 + 0x8e44) = extraout_XMM0_Dd_x01136;
  puVar4[-0x346] = 0x902135;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x11d6];
  *puVar1 = extraout_XMM0_Da_x01137;
  puVar1[1] = extraout_XMM0_Db_x01137;
  puVar1[2] = extraout_XMM0_Dc_x01137;
  puVar1[3] = extraout_XMM0_Dd_x01137;
  puVar4[-0x346] = 0x902155;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x11ce];
  *puVar1 = extraout_XMM0_Da_x01138;
  puVar1[1] = extraout_XMM0_Db_x01138;
  puVar1[2] = extraout_XMM0_Dc_x01138;
  puVar1[3] = extraout_XMM0_Dd_x01138;
  puVar4[0x7fd] = puVar4[0x1df5];
  puVar4[0x7fe] = puVar4[0x1df6];
  puVar4[0x7ff] = puVar4[0x1df3];
  puVar4[0x800] = puVar4[0x1df4];
  puVar4[0x801] = puVar4[0x1df1];
  puVar4[0x802] = puVar4[0x1df2];
  puVar4[0x803] = puVar4[0x1dfd];
  puVar4[0x804] = puVar4[0x1dfe];
  puVar4[0x805] = puVar4[0x1dfb];
  puVar4[0x806] = puVar4[0x1dfc];
  puVar4[0x807] = puVar4[0x1df9];
  puVar4[0x808] = puVar4[0x1dfa];
  puVar4[-0x346] = 0x9021cc;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x11c5] = puVar4[0x7fd];
  puVar4[0x11c6] = puVar4[0x7fe];
  puVar4[0x11c3] = puVar4[0x7ff];
  puVar4[0x11c4] = puVar4[0x800];
  puVar4[0x11c1] = puVar4[0x801];
  puVar4[0x11c2] = puVar4[0x802];
  puVar4[0x11c0] = puVar4[0xcae];
  puVar4[0x11bd] = puVar4[0x803];
  puVar4[0x11be] = puVar4[0x804];
  puVar4[0x11bb] = puVar4[0x805];
  puVar4[0x11bc] = puVar4[0x806];
  puVar4[0x11b9] = puVar4[0x807];
  puVar4[0x11ba] = puVar4[0x808];
  puVar4[0x11b8] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x11b5) = extraout_XMM0_Da_x01139;
  *(undefined4 *)((long)puVar4 + 0x8dac) = extraout_XMM0_Db_x01139;
  *(undefined4 *)(puVar4 + 0x11b6) = extraout_XMM0_Dc_x01139;
  *(undefined4 *)((long)puVar4 + 0x8db4) = extraout_XMM0_Dd_x01139;
  uVar2 = ((undefined8 *)puVar4[0x11b8])[1];
  puVar4[0x80b] = *(undefined8 *)puVar4[0x11b8];
  puVar4[0x80c] = uVar2;
  puVar4[-0x346] = 0x902274;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x809) = extraout_XMM0_Da_x01140;
  *(undefined4 *)((long)puVar4 + 0x404c) = extraout_XMM0_Db_x01140;
  *(undefined4 *)(puVar4 + 0x80a) = extraout_XMM0_Dc_x01140;
  *(undefined4 *)((long)puVar4 + 0x4054) = extraout_XMM0_Dd_x01140;
  puVar4[-0x346] = 0x902299;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9022b9;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x11b3) = extraout_XMM0_Da_x01141;
  *(undefined4 *)((long)puVar4 + 0x8d9c) = extraout_XMM0_Db_x01141;
  *(undefined4 *)(puVar4 + 0x11b4) = extraout_XMM0_Dc_x01141;
  *(undefined4 *)((long)puVar4 + 0x8da4) = extraout_XMM0_Dd_x01141;
  puVar4[-0x346] = 0x9022ce;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x80d) = extraout_XMM0_Da_x01142;
  *(undefined4 *)((long)puVar4 + 0x406c) = extraout_XMM0_Db_x01142;
  *(undefined4 *)(puVar4 + 0x80e) = extraout_XMM0_Dc_x01142;
  *(undefined4 *)((long)puVar4 + 0x4074) = extraout_XMM0_Dd_x01142;
  puVar4[-0x346] = 0x9022f3;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x902303;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x11b1) = extraout_XMM0_Da_x01143;
  *(undefined4 *)((long)puVar4 + 0x8d8c) = extraout_XMM0_Db_x01143;
  *(undefined4 *)(puVar4 + 0x11b2) = extraout_XMM0_Dc_x01143;
  *(undefined4 *)((long)puVar4 + 0x8d94) = extraout_XMM0_Dd_x01143;
  puVar4[-0x346] = 0x902323;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x11c0];
  *puVar1 = extraout_XMM0_Da_x01144;
  puVar1[1] = extraout_XMM0_Db_x01144;
  puVar1[2] = extraout_XMM0_Dc_x01144;
  puVar1[3] = extraout_XMM0_Dd_x01144;
  puVar4[-0x346] = 0x902343;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x11b8];
  *puVar1 = extraout_XMM0_Da_x01145;
  puVar1[1] = extraout_XMM0_Db_x01145;
  puVar1[2] = extraout_XMM0_Dc_x01145;
  puVar1[3] = extraout_XMM0_Dd_x01145;
  puVar4[0x811] = puVar4[0x1df7];
  puVar4[0x812] = puVar4[0x1df8];
  puVar4[0x813] = puVar4[0x1df5];
  puVar4[0x814] = puVar4[0x1df6];
  puVar4[0x815] = puVar4[0x1df3];
  puVar4[0x816] = puVar4[0x1df4];
  puVar4[0x817] = puVar4[0x1def];
  puVar4[0x818] = puVar4[0x1df0];
  puVar4[0x819] = puVar4[0x1dfd];
  puVar4[0x81a] = puVar4[0x1dfe];
  puVar4[0x81b] = puVar4[0x1dfb];
  puVar4[0x81c] = puVar4[0x1dfc];
  puVar4[-0x346] = 0x9023ba;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x11af] = puVar4[0x811];
  puVar4[0x11b0] = puVar4[0x812];
  puVar4[0x11ad] = puVar4[0x813];
  puVar4[0x11ae] = puVar4[0x814];
  puVar4[0x11ab] = puVar4[0x815];
  puVar4[0x11ac] = puVar4[0x816];
  puVar4[0x11aa] = puVar4[0xccc];
  puVar4[0x11a7] = puVar4[0x817];
  puVar4[0x11a8] = puVar4[0x818];
  puVar4[0x11a5] = puVar4[0x819];
  puVar4[0x11a6] = puVar4[0x81a];
  puVar4[0x11a3] = puVar4[0x81b];
  puVar4[0x11a4] = puVar4[0x81c];
  puVar4[0x11a2] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x119f) = extraout_XMM0_Da_x01146;
  *(undefined4 *)((long)puVar4 + 0x8cfc) = extraout_XMM0_Db_x01146;
  *(undefined4 *)(puVar4 + 0x11a0) = extraout_XMM0_Dc_x01146;
  *(undefined4 *)((long)puVar4 + 0x8d04) = extraout_XMM0_Dd_x01146;
  uVar2 = ((undefined8 *)puVar4[0x11a2])[1];
  puVar4[0x81f] = *(undefined8 *)puVar4[0x11a2];
  puVar4[0x820] = uVar2;
  puVar4[-0x346] = 0x902462;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x81d) = extraout_XMM0_Da_x01147;
  *(undefined4 *)((long)puVar4 + 0x40ec) = extraout_XMM0_Db_x01147;
  *(undefined4 *)(puVar4 + 0x81e) = extraout_XMM0_Dc_x01147;
  *(undefined4 *)((long)puVar4 + 0x40f4) = extraout_XMM0_Dd_x01147;
  puVar4[-0x346] = 0x902487;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9024a7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x119d) = extraout_XMM0_Da_x01148;
  *(undefined4 *)((long)puVar4 + 0x8cec) = extraout_XMM0_Db_x01148;
  *(undefined4 *)(puVar4 + 0x119e) = extraout_XMM0_Dc_x01148;
  *(undefined4 *)((long)puVar4 + 0x8cf4) = extraout_XMM0_Dd_x01148;
  puVar4[-0x346] = 0x9024bc;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x821) = extraout_XMM0_Da_x01149;
  *(undefined4 *)((long)puVar4 + 0x410c) = extraout_XMM0_Db_x01149;
  *(undefined4 *)(puVar4 + 0x822) = extraout_XMM0_Dc_x01149;
  *(undefined4 *)((long)puVar4 + 0x4114) = extraout_XMM0_Dd_x01149;
  puVar4[-0x346] = 0x9024e1;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9024f1;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x119b) = extraout_XMM0_Da_x01150;
  *(undefined4 *)((long)puVar4 + 0x8cdc) = extraout_XMM0_Db_x01150;
  *(undefined4 *)(puVar4 + 0x119c) = extraout_XMM0_Dc_x01150;
  *(undefined4 *)((long)puVar4 + 0x8ce4) = extraout_XMM0_Dd_x01150;
  puVar4[-0x346] = 0x902511;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x11aa];
  *puVar1 = extraout_XMM0_Da_x01151;
  puVar1[1] = extraout_XMM0_Db_x01151;
  puVar1[2] = extraout_XMM0_Dc_x01151;
  puVar1[3] = extraout_XMM0_Dd_x01151;
  puVar4[-0x346] = 0x902531;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x11a2];
  *puVar1 = extraout_XMM0_Da_x01152;
  puVar1[1] = extraout_XMM0_Db_x01152;
  puVar1[2] = extraout_XMM0_Dc_x01152;
  puVar1[3] = extraout_XMM0_Dd_x01152;
  puVar4[0x825] = puVar4[0x1df9];
  puVar4[0x826] = puVar4[0x1dfa];
  puVar4[0x827] = puVar4[0x1df7];
  puVar4[0x828] = puVar4[0x1df8];
  puVar4[0x829] = puVar4[0x1df5];
  puVar4[0x82a] = puVar4[0x1df6];
  puVar4[0x82b] = puVar4[0x1df1];
  puVar4[0x82c] = puVar4[0x1df2];
  puVar4[0x82d] = puVar4[0x1def];
  puVar4[0x82e] = puVar4[0x1df0];
  puVar4[0x82f] = puVar4[0x1dfd];
  puVar4[0x830] = puVar4[0x1dfe];
  puVar4[-0x346] = 0x9025a8;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1199] = puVar4[0x825];
  puVar4[0x119a] = puVar4[0x826];
  puVar4[0x1197] = puVar4[0x827];
  puVar4[0x1198] = puVar4[0x828];
  puVar4[0x1195] = puVar4[0x829];
  puVar4[0x1196] = puVar4[0x82a];
  puVar4[0x1194] = puVar4[0xcec];
  puVar4[0x1191] = puVar4[0x82b];
  puVar4[0x1192] = puVar4[0x82c];
  puVar4[0x118f] = puVar4[0x82d];
  puVar4[0x1190] = puVar4[0x82e];
  puVar4[0x118d] = puVar4[0x82f];
  puVar4[0x118e] = puVar4[0x830];
  puVar4[0x118c] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x1189) = extraout_XMM0_Da_x01153;
  *(undefined4 *)((long)puVar4 + 0x8c4c) = extraout_XMM0_Db_x01153;
  *(undefined4 *)(puVar4 + 0x118a) = extraout_XMM0_Dc_x01153;
  *(undefined4 *)((long)puVar4 + 0x8c54) = extraout_XMM0_Dd_x01153;
  uVar2 = ((undefined8 *)puVar4[0x118c])[1];
  puVar4[0x833] = *(undefined8 *)puVar4[0x118c];
  puVar4[0x834] = uVar2;
  puVar4[-0x346] = 0x902650;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x831) = extraout_XMM0_Da_x01154;
  *(undefined4 *)((long)puVar4 + 0x418c) = extraout_XMM0_Db_x01154;
  *(undefined4 *)(puVar4 + 0x832) = extraout_XMM0_Dc_x01154;
  *(undefined4 *)((long)puVar4 + 0x4194) = extraout_XMM0_Dd_x01154;
  puVar4[-0x346] = 0x902675;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x902695;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1187) = extraout_XMM0_Da_x01155;
  *(undefined4 *)((long)puVar4 + 0x8c3c) = extraout_XMM0_Db_x01155;
  *(undefined4 *)(puVar4 + 0x1188) = extraout_XMM0_Dc_x01155;
  *(undefined4 *)((long)puVar4 + 0x8c44) = extraout_XMM0_Dd_x01155;
  puVar4[-0x346] = 0x9026aa;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x835) = extraout_XMM0_Da_x01156;
  *(undefined4 *)((long)puVar4 + 0x41ac) = extraout_XMM0_Db_x01156;
  *(undefined4 *)(puVar4 + 0x836) = extraout_XMM0_Dc_x01156;
  *(undefined4 *)((long)puVar4 + 0x41b4) = extraout_XMM0_Dd_x01156;
  puVar4[-0x346] = 0x9026cf;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9026df;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1185) = extraout_XMM0_Da_x01157;
  *(undefined4 *)((long)puVar4 + 0x8c2c) = extraout_XMM0_Db_x01157;
  *(undefined4 *)(puVar4 + 0x1186) = extraout_XMM0_Dc_x01157;
  *(undefined4 *)((long)puVar4 + 0x8c34) = extraout_XMM0_Dd_x01157;
  puVar4[-0x346] = 0x9026ff;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1194];
  *puVar1 = extraout_XMM0_Da_x01158;
  puVar1[1] = extraout_XMM0_Db_x01158;
  puVar1[2] = extraout_XMM0_Dc_x01158;
  puVar1[3] = extraout_XMM0_Dd_x01158;
  puVar4[-0x346] = 0x90271f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x118c];
  *puVar1 = extraout_XMM0_Da_x01159;
  puVar1[1] = extraout_XMM0_Db_x01159;
  puVar1[2] = extraout_XMM0_Dc_x01159;
  puVar1[3] = extraout_XMM0_Dd_x01159;
  puVar4[0x837] = puVar4[0x1dfb];
  puVar4[0x838] = puVar4[0x1dfc];
  puVar4[0x839] = puVar4[0x1df9];
  puVar4[0x83a] = puVar4[0x1dfa];
  puVar4[0x83b] = puVar4[0x1df7];
  puVar4[0x83c] = puVar4[0x1df8];
  puVar4[0x83d] = puVar4[0x1df3];
  puVar4[0x83e] = puVar4[0x1df4];
  puVar4[0x83f] = puVar4[0x1df1];
  puVar4[0x840] = puVar4[0x1df2];
  puVar4[0x841] = puVar4[0x1def];
  puVar4[0x842] = puVar4[0x1df0];
  puVar4[-0x346] = 0x902794;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[0x1183] = puVar4[0x837];
  puVar4[0x1184] = puVar4[0x838];
  puVar4[0x1181] = puVar4[0x839];
  puVar4[0x1182] = puVar4[0x83a];
  puVar4[0x117f] = puVar4[0x83b];
  puVar4[0x1180] = puVar4[0x83c];
  puVar4[0x117e] = puVar4[0xd0c];
  puVar4[0x117b] = puVar4[0x83d];
  puVar4[0x117c] = puVar4[0x83e];
  puVar4[0x1179] = puVar4[0x83f];
  puVar4[0x117a] = puVar4[0x840];
  puVar4[0x1177] = puVar4[0x841];
  puVar4[0x1178] = puVar4[0x842];
  puVar4[0x1176] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x1173) = extraout_XMM0_Da_x01160;
  *(undefined4 *)((long)puVar4 + 0x8b9c) = extraout_XMM0_Db_x01160;
  *(undefined4 *)(puVar4 + 0x1174) = extraout_XMM0_Dc_x01160;
  *(undefined4 *)((long)puVar4 + 0x8ba4) = extraout_XMM0_Dd_x01160;
  uVar2 = ((undefined8 *)puVar4[0x1176])[1];
  puVar4[0x845] = *(undefined8 *)puVar4[0x1176];
  puVar4[0x846] = uVar2;
  puVar4[-0x346] = 0x90283c;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x843) = extraout_XMM0_Da_x01161;
  *(undefined4 *)((long)puVar4 + 0x421c) = extraout_XMM0_Db_x01161;
  *(undefined4 *)(puVar4 + 0x844) = extraout_XMM0_Dc_x01161;
  *(undefined4 *)((long)puVar4 + 0x4224) = extraout_XMM0_Dd_x01161;
  puVar4[-0x346] = 0x902861;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x902881;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1171) = extraout_XMM0_Da_x01162;
  *(undefined4 *)((long)puVar4 + 0x8b8c) = extraout_XMM0_Db_x01162;
  *(undefined4 *)(puVar4 + 0x1172) = extraout_XMM0_Dc_x01162;
  *(undefined4 *)((long)puVar4 + 0x8b94) = extraout_XMM0_Dd_x01162;
  puVar4[-0x346] = 0x902896;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x847) = extraout_XMM0_Da_x01163;
  *(undefined4 *)((long)puVar4 + 0x423c) = extraout_XMM0_Db_x01163;
  *(undefined4 *)(puVar4 + 0x848) = extraout_XMM0_Dc_x01163;
  *(undefined4 *)((long)puVar4 + 0x4244) = extraout_XMM0_Dd_x01163;
  puVar4[-0x346] = 0x9028bb;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9028cb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x116f) = extraout_XMM0_Da_x01164;
  *(undefined4 *)((long)puVar4 + 0x8b7c) = extraout_XMM0_Db_x01164;
  *(undefined4 *)(puVar4 + 0x1170) = extraout_XMM0_Dc_x01164;
  *(undefined4 *)((long)puVar4 + 0x8b84) = extraout_XMM0_Dd_x01164;
  puVar4[-0x346] = 0x9028eb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x117e];
  *puVar1 = extraout_XMM0_Da_x01165;
  puVar1[1] = extraout_XMM0_Db_x01165;
  puVar1[2] = extraout_XMM0_Dc_x01165;
  puVar1[3] = extraout_XMM0_Dd_x01165;
  puVar4[-0x346] = 0x90290b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1176];
  *puVar1 = extraout_XMM0_Da_x01166;
  puVar1[1] = extraout_XMM0_Db_x01166;
  puVar1[2] = extraout_XMM0_Dc_x01166;
  puVar1[3] = extraout_XMM0_Dd_x01166;
  puVar4[0x84d] = puVar4[0x1dfd];
  puVar4[0x84e] = puVar4[0x1dfe];
  puVar4[0x84f] = puVar4[0x1dfb];
  puVar4[0x850] = puVar4[0x1dfc];
  puVar4[0x851] = puVar4[0x1df9];
  puVar4[0x852] = puVar4[0x1dfa];
  puVar4[0x853] = puVar4[0x1df5];
  puVar4[0x854] = puVar4[0x1df6];
  puVar4[0x855] = puVar4[0x1df3];
  puVar4[0x856] = puVar4[0x1df4];
  puVar4[0x857] = puVar4[0x1df1];
  puVar4[0x858] = puVar4[0x1df2];
  puVar4[-0x346] = 0x902982;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x84b) = extraout_XMM0_Da_x01167;
  *(undefined4 *)((long)puVar4 + 0x425c) = extraout_XMM0_Db_x01167;
  *(undefined4 *)(puVar4 + 0x84c) = extraout_XMM0_Dc_x01167;
  *(undefined4 *)((long)puVar4 + 0x4264) = extraout_XMM0_Dd_x01167;
  puVar4[-0x346] = 0x902997;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x9029a4;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x341],*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x9029b4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x116d] = puVar4[0x84d];
  puVar4[0x116e] = puVar4[0x84e];
  puVar4[0x116b] = puVar4[0x84f];
  puVar4[0x116c] = puVar4[0x850];
  puVar4[0x1169] = puVar4[0x851];
  puVar4[0x116a] = puVar4[0x852];
  puVar4[0x1168] = puVar4[0xcb6];
  puVar4[0x1165] = puVar4[0x853];
  puVar4[0x1166] = puVar4[0x854];
  puVar4[0x1163] = puVar4[0x855];
  puVar4[0x1164] = puVar4[0x856];
  puVar4[0x1161] = puVar4[0x857];
  puVar4[0x1162] = puVar4[0x858];
  puVar4[0x1160] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x115d) = extraout_XMM0_Da_x01168;
  *(undefined4 *)((long)puVar4 + 0x8aec) = extraout_XMM0_Db_x01168;
  *(undefined4 *)(puVar4 + 0x115e) = extraout_XMM0_Dc_x01168;
  *(undefined4 *)((long)puVar4 + 0x8af4) = extraout_XMM0_Dd_x01168;
  uVar2 = ((undefined8 *)puVar4[0x1160])[1];
  puVar4[0x85b] = *(undefined8 *)puVar4[0x1160];
  puVar4[0x85c] = uVar2;
  puVar4[-0x346] = 0x902a5c;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x859) = extraout_XMM0_Da_x01169;
  *(undefined4 *)((long)puVar4 + 0x42cc) = extraout_XMM0_Db_x01169;
  *(undefined4 *)(puVar4 + 0x85a) = extraout_XMM0_Dc_x01169;
  *(undefined4 *)((long)puVar4 + 0x42d4) = extraout_XMM0_Dd_x01169;
  puVar4[-0x346] = 0x902a81;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x902aa1;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x115b) = extraout_XMM0_Da_x01170;
  *(undefined4 *)((long)puVar4 + 0x8adc) = extraout_XMM0_Db_x01170;
  *(undefined4 *)(puVar4 + 0x115c) = extraout_XMM0_Dc_x01170;
  *(undefined4 *)((long)puVar4 + 0x8ae4) = extraout_XMM0_Dd_x01170;
  puVar4[-0x346] = 0x902ab6;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x85d) = extraout_XMM0_Da_x01171;
  *(undefined4 *)((long)puVar4 + 0x42ec) = extraout_XMM0_Db_x01171;
  *(undefined4 *)(puVar4 + 0x85e) = extraout_XMM0_Dc_x01171;
  *(undefined4 *)((long)puVar4 + 0x42f4) = extraout_XMM0_Dd_x01171;
  puVar4[-0x346] = 0x902adb;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x902aeb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1159) = extraout_XMM0_Da_x01172;
  *(undefined4 *)((long)puVar4 + 0x8acc) = extraout_XMM0_Db_x01172;
  *(undefined4 *)(puVar4 + 0x115a) = extraout_XMM0_Dc_x01172;
  *(undefined4 *)((long)puVar4 + 0x8ad4) = extraout_XMM0_Dd_x01172;
  puVar4[-0x346] = 0x902b0b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1168];
  *puVar1 = extraout_XMM0_Da_x01173;
  puVar1[1] = extraout_XMM0_Db_x01173;
  puVar1[2] = extraout_XMM0_Dc_x01173;
  puVar1[3] = extraout_XMM0_Dd_x01173;
  puVar4[-0x346] = 0x902b2b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1160];
  *puVar1 = extraout_XMM0_Da_x01174;
  puVar1[1] = extraout_XMM0_Db_x01174;
  puVar1[2] = extraout_XMM0_Dc_x01174;
  puVar1[3] = extraout_XMM0_Dd_x01174;
  puVar4[0x865] = puVar4[0x1def];
  puVar4[0x866] = puVar4[0x1df0];
  puVar4[0x867] = puVar4[0x1dfd];
  puVar4[0x868] = puVar4[0x1dfe];
  puVar4[0x869] = puVar4[0x1dfb];
  puVar4[0x86a] = puVar4[0x1dfc];
  puVar4[0x86b] = puVar4[0x1df7];
  puVar4[0x86c] = puVar4[0x1df8];
  puVar4[0x86d] = puVar4[0x1df5];
  puVar4[0x86e] = puVar4[0x1df6];
  puVar4[0x86f] = puVar4[0x1df3];
  puVar4[0x870] = puVar4[0x1df4];
  puVar4[-0x346] = 0x902ba2;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x863) = extraout_XMM0_Da_x01175;
  *(undefined4 *)((long)puVar4 + 0x431c) = extraout_XMM0_Db_x01175;
  *(undefined4 *)(puVar4 + 0x864) = extraout_XMM0_Dc_x01175;
  *(undefined4 *)((long)puVar4 + 0x4324) = extraout_XMM0_Dd_x01175;
  puVar4[-0x346] = 0x902bb4;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x861) = extraout_XMM0_Da_x01176;
  *(undefined4 *)((long)puVar4 + 0x430c) = extraout_XMM0_Db_x01176;
  *(undefined4 *)(puVar4 + 0x862) = extraout_XMM0_Dc_x01176;
  *(undefined4 *)((long)puVar4 + 0x4314) = extraout_XMM0_Dd_x01176;
  puVar4[-0x346] = 0x902bc9;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x902be1;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33f],*(__m128i *)(puVar4 + -0x342),
                      *(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x902bf1;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1157] = puVar4[0x865];
  puVar4[0x1158] = puVar4[0x866];
  puVar4[0x1155] = puVar4[0x867];
  puVar4[0x1156] = puVar4[0x868];
  puVar4[0x1153] = puVar4[0x869];
  puVar4[0x1154] = puVar4[0x86a];
  puVar4[0x1152] = puVar4[0xcd4];
  puVar4[0x114f] = puVar4[0x86b];
  puVar4[0x1150] = puVar4[0x86c];
  puVar4[0x114d] = puVar4[0x86d];
  puVar4[0x114e] = puVar4[0x86e];
  puVar4[0x114b] = puVar4[0x86f];
  puVar4[0x114c] = puVar4[0x870];
  puVar4[0x114a] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x1147) = extraout_XMM0_Da_x01177;
  *(undefined4 *)((long)puVar4 + 0x8a3c) = extraout_XMM0_Db_x01177;
  *(undefined4 *)(puVar4 + 0x1148) = extraout_XMM0_Dc_x01177;
  *(undefined4 *)((long)puVar4 + 0x8a44) = extraout_XMM0_Dd_x01177;
  uVar2 = ((undefined8 *)puVar4[0x114a])[1];
  puVar4[0x873] = *(undefined8 *)puVar4[0x114a];
  puVar4[0x874] = uVar2;
  puVar4[-0x346] = 0x902c99;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x871) = extraout_XMM0_Da_x01178;
  *(undefined4 *)((long)puVar4 + 0x438c) = extraout_XMM0_Db_x01178;
  *(undefined4 *)(puVar4 + 0x872) = extraout_XMM0_Dc_x01178;
  *(undefined4 *)((long)puVar4 + 0x4394) = extraout_XMM0_Dd_x01178;
  puVar4[-0x346] = 0x902cbe;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x902cde;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1145) = extraout_XMM0_Da_x01179;
  *(undefined4 *)((long)puVar4 + 0x8a2c) = extraout_XMM0_Db_x01179;
  *(undefined4 *)(puVar4 + 0x1146) = extraout_XMM0_Dc_x01179;
  *(undefined4 *)((long)puVar4 + 0x8a34) = extraout_XMM0_Dd_x01179;
  puVar4[-0x346] = 0x902cf3;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x875) = extraout_XMM0_Da_x01180;
  *(undefined4 *)((long)puVar4 + 0x43ac) = extraout_XMM0_Db_x01180;
  *(undefined4 *)(puVar4 + 0x876) = extraout_XMM0_Dc_x01180;
  *(undefined4 *)((long)puVar4 + 0x43b4) = extraout_XMM0_Dd_x01180;
  puVar4[-0x346] = 0x902d18;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x902d28;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1143) = extraout_XMM0_Da_x01181;
  *(undefined4 *)((long)puVar4 + 0x8a1c) = extraout_XMM0_Db_x01181;
  *(undefined4 *)(puVar4 + 0x1144) = extraout_XMM0_Dc_x01181;
  *(undefined4 *)((long)puVar4 + 0x8a24) = extraout_XMM0_Dd_x01181;
  puVar4[-0x346] = 0x902d48;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1152];
  *puVar1 = extraout_XMM0_Da_x01182;
  puVar1[1] = extraout_XMM0_Db_x01182;
  puVar1[2] = extraout_XMM0_Dc_x01182;
  puVar1[3] = extraout_XMM0_Dd_x01182;
  puVar4[-0x346] = 0x902d68;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x114a];
  *puVar1 = extraout_XMM0_Da_x01183;
  puVar1[1] = extraout_XMM0_Db_x01183;
  puVar1[2] = extraout_XMM0_Dc_x01183;
  puVar1[3] = extraout_XMM0_Dd_x01183;
  puVar4[0x87d] = puVar4[0x1df1];
  puVar4[0x87e] = puVar4[0x1df2];
  puVar4[0x87f] = puVar4[0x1def];
  puVar4[0x880] = puVar4[0x1df0];
  puVar4[0x881] = puVar4[0x1dfd];
  puVar4[0x882] = puVar4[0x1dfe];
  puVar4[0x883] = puVar4[0x1df9];
  puVar4[0x884] = puVar4[0x1dfa];
  puVar4[0x885] = puVar4[0x1df7];
  puVar4[0x886] = puVar4[0x1df8];
  puVar4[0x887] = puVar4[0x1df5];
  puVar4[0x888] = puVar4[0x1df6];
  puVar4[-0x346] = 0x902ddf;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x87b) = extraout_XMM0_Da_x01184;
  *(undefined4 *)((long)puVar4 + 0x43dc) = extraout_XMM0_Db_x01184;
  *(undefined4 *)(puVar4 + 0x87c) = extraout_XMM0_Dc_x01184;
  *(undefined4 *)((long)puVar4 + 0x43e4) = extraout_XMM0_Dd_x01184;
  puVar4[-0x346] = 0x902df4;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x879) = extraout_XMM0_Da_x01185;
  *(undefined4 *)((long)puVar4 + 0x43cc) = extraout_XMM0_Db_x01185;
  *(undefined4 *)(puVar4 + 0x87a) = extraout_XMM0_Dc_x01185;
  *(undefined4 *)((long)puVar4 + 0x43d4) = extraout_XMM0_Dd_x01185;
  puVar4[-0x346] = 0x902e09;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x902e21;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33f],*(__m128i *)(puVar4 + -0x342),
                      *(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x902e31;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1141] = puVar4[0x87d];
  puVar4[0x1142] = puVar4[0x87e];
  puVar4[0x113f] = puVar4[0x87f];
  puVar4[0x1140] = puVar4[0x880];
  puVar4[0x113d] = puVar4[0x881];
  puVar4[0x113e] = puVar4[0x882];
  puVar4[0x113c] = puVar4[0xcf4];
  puVar4[0x1139] = puVar4[0x883];
  puVar4[0x113a] = puVar4[0x884];
  puVar4[0x1137] = puVar4[0x885];
  puVar4[0x1138] = puVar4[0x886];
  puVar4[0x1135] = puVar4[0x887];
  puVar4[0x1136] = puVar4[0x888];
  puVar4[0x1134] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x1131) = extraout_XMM0_Da_x01186;
  *(undefined4 *)((long)puVar4 + 0x898c) = extraout_XMM0_Db_x01186;
  *(undefined4 *)(puVar4 + 0x1132) = extraout_XMM0_Dc_x01186;
  *(undefined4 *)((long)puVar4 + 0x8994) = extraout_XMM0_Dd_x01186;
  uVar2 = ((undefined8 *)puVar4[0x1134])[1];
  puVar4[0x88b] = *(undefined8 *)puVar4[0x1134];
  puVar4[0x88c] = uVar2;
  puVar4[-0x346] = 0x902ed9;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x889) = extraout_XMM0_Da_x01187;
  *(undefined4 *)((long)puVar4 + 0x444c) = extraout_XMM0_Db_x01187;
  *(undefined4 *)(puVar4 + 0x88a) = extraout_XMM0_Dc_x01187;
  *(undefined4 *)((long)puVar4 + 0x4454) = extraout_XMM0_Dd_x01187;
  puVar4[-0x346] = 0x902efe;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x902f1e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x112f) = extraout_XMM0_Da_x01188;
  *(undefined4 *)((long)puVar4 + 0x897c) = extraout_XMM0_Db_x01188;
  *(undefined4 *)(puVar4 + 0x1130) = extraout_XMM0_Dc_x01188;
  *(undefined4 *)((long)puVar4 + 0x8984) = extraout_XMM0_Dd_x01188;
  puVar4[-0x346] = 0x902f33;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x88d) = extraout_XMM0_Da_x01189;
  *(undefined4 *)((long)puVar4 + 0x446c) = extraout_XMM0_Db_x01189;
  *(undefined4 *)(puVar4 + 0x88e) = extraout_XMM0_Dc_x01189;
  *(undefined4 *)((long)puVar4 + 0x4474) = extraout_XMM0_Dd_x01189;
  puVar4[-0x346] = 0x902f58;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x902f68;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x112d) = extraout_XMM0_Da_x01190;
  *(undefined4 *)((long)puVar4 + 0x896c) = extraout_XMM0_Db_x01190;
  *(undefined4 *)(puVar4 + 0x112e) = extraout_XMM0_Dc_x01190;
  *(undefined4 *)((long)puVar4 + 0x8974) = extraout_XMM0_Dd_x01190;
  puVar4[-0x346] = 0x902f88;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x113c];
  *puVar1 = extraout_XMM0_Da_x01191;
  puVar1[1] = extraout_XMM0_Db_x01191;
  puVar1[2] = extraout_XMM0_Dc_x01191;
  puVar1[3] = extraout_XMM0_Dd_x01191;
  puVar4[-0x346] = 0x902fa8;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1134];
  *puVar1 = extraout_XMM0_Da_x01192;
  puVar1[1] = extraout_XMM0_Db_x01192;
  puVar1[2] = extraout_XMM0_Dc_x01192;
  puVar1[3] = extraout_XMM0_Dd_x01192;
  puVar4[0x895] = puVar4[0x1df3];
  puVar4[0x896] = puVar4[0x1df4];
  puVar4[0x897] = puVar4[0x1df1];
  puVar4[0x898] = puVar4[0x1df2];
  puVar4[0x899] = puVar4[0x1def];
  puVar4[0x89a] = puVar4[0x1df0];
  puVar4[0x89b] = puVar4[0x1dfb];
  puVar4[0x89c] = puVar4[0x1dfc];
  puVar4[0x89d] = puVar4[0x1df9];
  puVar4[0x89e] = puVar4[0x1dfa];
  puVar4[0x89f] = puVar4[0x1df7];
  puVar4[0x8a0] = puVar4[0x1df8];
  puVar4[-0x346] = 0x90301f;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x893) = extraout_XMM0_Da_x01193;
  *(undefined4 *)((long)puVar4 + 0x449c) = extraout_XMM0_Db_x01193;
  *(undefined4 *)(puVar4 + 0x894) = extraout_XMM0_Dc_x01193;
  *(undefined4 *)((long)puVar4 + 0x44a4) = extraout_XMM0_Dd_x01193;
  puVar4[-0x346] = 0x903034;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x891) = extraout_XMM0_Da_x01194;
  *(undefined4 *)((long)puVar4 + 0x448c) = extraout_XMM0_Db_x01194;
  *(undefined4 *)(puVar4 + 0x892) = extraout_XMM0_Dc_x01194;
  *(undefined4 *)((long)puVar4 + 0x4494) = extraout_XMM0_Dd_x01194;
  puVar4[-0x346] = 0x903049;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x903061;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33f],*(__m128i *)(puVar4 + -0x342),
                      *(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x903071;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x112b] = puVar4[0x895];
  puVar4[0x112c] = puVar4[0x896];
  puVar4[0x1129] = puVar4[0x897];
  puVar4[0x112a] = puVar4[0x898];
  puVar4[0x1127] = puVar4[0x899];
  puVar4[0x1128] = puVar4[0x89a];
  puVar4[0x1126] = puVar4[0xd14];
  puVar4[0x1123] = puVar4[0x89b];
  puVar4[0x1124] = puVar4[0x89c];
  puVar4[0x1121] = puVar4[0x89d];
  puVar4[0x1122] = puVar4[0x89e];
  puVar4[0x111f] = puVar4[0x89f];
  puVar4[0x1120] = puVar4[0x8a0];
  puVar4[0x111e] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x111b) = extraout_XMM0_Da_x01195;
  *(undefined4 *)((long)puVar4 + 0x88dc) = extraout_XMM0_Db_x01195;
  *(undefined4 *)(puVar4 + 0x111c) = extraout_XMM0_Dc_x01195;
  *(undefined4 *)((long)puVar4 + 0x88e4) = extraout_XMM0_Dd_x01195;
  uVar2 = ((undefined8 *)puVar4[0x111e])[1];
  puVar4[0x8a3] = *(undefined8 *)puVar4[0x111e];
  puVar4[0x8a4] = uVar2;
  puVar4[-0x346] = 0x903119;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x8a1) = extraout_XMM0_Da_x01196;
  *(undefined4 *)((long)puVar4 + 0x450c) = extraout_XMM0_Db_x01196;
  *(undefined4 *)(puVar4 + 0x8a2) = extraout_XMM0_Dc_x01196;
  *(undefined4 *)((long)puVar4 + 0x4514) = extraout_XMM0_Dd_x01196;
  puVar4[-0x346] = 0x90313e;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90315e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1119) = extraout_XMM0_Da_x01197;
  *(undefined4 *)((long)puVar4 + 0x88cc) = extraout_XMM0_Db_x01197;
  *(undefined4 *)(puVar4 + 0x111a) = extraout_XMM0_Dc_x01197;
  *(undefined4 *)((long)puVar4 + 0x88d4) = extraout_XMM0_Dd_x01197;
  puVar4[-0x346] = 0x903173;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x8a5) = extraout_XMM0_Da_x01198;
  *(undefined4 *)((long)puVar4 + 0x452c) = extraout_XMM0_Db_x01198;
  *(undefined4 *)(puVar4 + 0x8a6) = extraout_XMM0_Dc_x01198;
  *(undefined4 *)((long)puVar4 + 0x4534) = extraout_XMM0_Dd_x01198;
  puVar4[-0x346] = 0x903198;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9031a8;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1117) = extraout_XMM0_Da_x01199;
  *(undefined4 *)((long)puVar4 + 0x88bc) = extraout_XMM0_Db_x01199;
  *(undefined4 *)(puVar4 + 0x1118) = extraout_XMM0_Dc_x01199;
  *(undefined4 *)((long)puVar4 + 0x88c4) = extraout_XMM0_Dd_x01199;
  puVar4[-0x346] = 0x9031c8;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1126];
  *puVar1 = extraout_XMM0_Da_x01200;
  puVar1[1] = extraout_XMM0_Db_x01200;
  puVar1[2] = extraout_XMM0_Dc_x01200;
  puVar1[3] = extraout_XMM0_Dd_x01200;
  puVar4[-0x346] = 0x9031e8;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x111e];
  *puVar1 = extraout_XMM0_Da_x01201;
  puVar1[1] = extraout_XMM0_Db_x01201;
  puVar1[2] = extraout_XMM0_Dc_x01201;
  puVar1[3] = extraout_XMM0_Dd_x01201;
  puVar4[0x8ad] = puVar4[0x1df5];
  puVar4[0x8ae] = puVar4[0x1df6];
  puVar4[0x8af] = puVar4[0x1df3];
  puVar4[0x8b0] = puVar4[0x1df4];
  puVar4[0x8b1] = puVar4[0x1df1];
  puVar4[0x8b2] = puVar4[0x1df2];
  puVar4[0x8b3] = puVar4[0x1dfd];
  puVar4[0x8b4] = puVar4[0x1dfe];
  puVar4[0x8b5] = puVar4[0x1dfb];
  puVar4[0x8b6] = puVar4[0x1dfc];
  puVar4[0x8b7] = puVar4[0x1df9];
  puVar4[0x8b8] = puVar4[0x1dfa];
  puVar4[-0x346] = 0x90325f;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x8ab) = extraout_XMM0_Da_x01202;
  *(undefined4 *)((long)puVar4 + 0x455c) = extraout_XMM0_Db_x01202;
  *(undefined4 *)(puVar4 + 0x8ac) = extraout_XMM0_Dc_x01202;
  *(undefined4 *)((long)puVar4 + 0x4564) = extraout_XMM0_Dd_x01202;
  puVar4[-0x346] = 0x903274;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x8a9) = extraout_XMM0_Da_x01203;
  *(undefined4 *)((long)puVar4 + 0x454c) = extraout_XMM0_Db_x01203;
  *(undefined4 *)(puVar4 + 0x8aa) = extraout_XMM0_Dc_x01203;
  *(undefined4 *)((long)puVar4 + 0x4554) = extraout_XMM0_Dd_x01203;
  puVar4[-0x346] = 0x903289;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x9032a1;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33f],*(__m128i *)(puVar4 + -0x342),
                      *(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x9032b1;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1115] = puVar4[0x8ad];
  puVar4[0x1116] = puVar4[0x8ae];
  puVar4[0x1113] = puVar4[0x8af];
  puVar4[0x1114] = puVar4[0x8b0];
  puVar4[0x1111] = puVar4[0x8b1];
  puVar4[0x1112] = puVar4[0x8b2];
  puVar4[0x1110] = puVar4[0xcae];
  puVar4[0x110d] = puVar4[0x8b3];
  puVar4[0x110e] = puVar4[0x8b4];
  puVar4[0x110b] = puVar4[0x8b5];
  puVar4[0x110c] = puVar4[0x8b6];
  puVar4[0x1109] = puVar4[0x8b7];
  puVar4[0x110a] = puVar4[0x8b8];
  puVar4[0x1108] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x1105) = extraout_XMM0_Da_x01204;
  *(undefined4 *)((long)puVar4 + 0x882c) = extraout_XMM0_Db_x01204;
  *(undefined4 *)(puVar4 + 0x1106) = extraout_XMM0_Dc_x01204;
  *(undefined4 *)((long)puVar4 + 0x8834) = extraout_XMM0_Dd_x01204;
  uVar2 = ((undefined8 *)puVar4[0x1108])[1];
  puVar4[0x8bb] = *(undefined8 *)puVar4[0x1108];
  puVar4[0x8bc] = uVar2;
  puVar4[-0x346] = 0x903359;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x8b9) = extraout_XMM0_Da_x01205;
  *(undefined4 *)((long)puVar4 + 0x45cc) = extraout_XMM0_Db_x01205;
  *(undefined4 *)(puVar4 + 0x8ba) = extraout_XMM0_Dc_x01205;
  *(undefined4 *)((long)puVar4 + 0x45d4) = extraout_XMM0_Dd_x01205;
  puVar4[-0x346] = 0x90337e;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90339e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1103) = extraout_XMM0_Da_x01206;
  *(undefined4 *)((long)puVar4 + 0x881c) = extraout_XMM0_Db_x01206;
  *(undefined4 *)(puVar4 + 0x1104) = extraout_XMM0_Dc_x01206;
  *(undefined4 *)((long)puVar4 + 0x8824) = extraout_XMM0_Dd_x01206;
  puVar4[-0x346] = 0x9033b3;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x8bd) = extraout_XMM0_Da_x01207;
  *(undefined4 *)((long)puVar4 + 0x45ec) = extraout_XMM0_Db_x01207;
  *(undefined4 *)(puVar4 + 0x8be) = extraout_XMM0_Dc_x01207;
  *(undefined4 *)((long)puVar4 + 0x45f4) = extraout_XMM0_Dd_x01207;
  puVar4[-0x346] = 0x9033d8;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9033e8;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1101) = extraout_XMM0_Da_x01208;
  *(undefined4 *)((long)puVar4 + 0x880c) = extraout_XMM0_Db_x01208;
  *(undefined4 *)(puVar4 + 0x1102) = extraout_XMM0_Dc_x01208;
  *(undefined4 *)((long)puVar4 + 0x8814) = extraout_XMM0_Dd_x01208;
  puVar4[-0x346] = 0x903408;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1110];
  *puVar1 = extraout_XMM0_Da_x01209;
  puVar1[1] = extraout_XMM0_Db_x01209;
  puVar1[2] = extraout_XMM0_Dc_x01209;
  puVar1[3] = extraout_XMM0_Dd_x01209;
  puVar4[-0x346] = 0x903428;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1108];
  *puVar1 = extraout_XMM0_Da_x01210;
  puVar1[1] = extraout_XMM0_Db_x01210;
  puVar1[2] = extraout_XMM0_Dc_x01210;
  puVar1[3] = extraout_XMM0_Dd_x01210;
  puVar4[0x8c5] = puVar4[0x1df7];
  puVar4[0x8c6] = puVar4[0x1df8];
  puVar4[0x8c7] = puVar4[0x1df5];
  puVar4[0x8c8] = puVar4[0x1df6];
  puVar4[0x8c9] = puVar4[0x1df3];
  puVar4[0x8ca] = puVar4[0x1df4];
  puVar4[0x8cb] = puVar4[0x1def];
  puVar4[0x8cc] = puVar4[0x1df0];
  puVar4[0x8cd] = puVar4[0x1dfd];
  puVar4[0x8ce] = puVar4[0x1dfe];
  puVar4[0x8cf] = puVar4[0x1dfb];
  puVar4[0x8d0] = puVar4[0x1dfc];
  puVar4[-0x346] = 0x90349f;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x8c3) = extraout_XMM0_Da_x01211;
  *(undefined4 *)((long)puVar4 + 0x461c) = extraout_XMM0_Db_x01211;
  *(undefined4 *)(puVar4 + 0x8c4) = extraout_XMM0_Dc_x01211;
  *(undefined4 *)((long)puVar4 + 0x4624) = extraout_XMM0_Dd_x01211;
  puVar4[-0x346] = 0x9034b4;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x8c1) = extraout_XMM0_Da_x01212;
  *(undefined4 *)((long)puVar4 + 0x460c) = extraout_XMM0_Db_x01212;
  *(undefined4 *)(puVar4 + 0x8c2) = extraout_XMM0_Dc_x01212;
  *(undefined4 *)((long)puVar4 + 0x4614) = extraout_XMM0_Dd_x01212;
  puVar4[-0x346] = 0x9034c9;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x9034e1;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33f],*(__m128i *)(puVar4 + -0x342),
                      *(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x9034f1;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x10ff] = puVar4[0x8c5];
  puVar4[0x1100] = puVar4[0x8c6];
  puVar4[0x10fd] = puVar4[0x8c7];
  puVar4[0x10fe] = puVar4[0x8c8];
  puVar4[0x10fb] = puVar4[0x8c9];
  puVar4[0x10fc] = puVar4[0x8ca];
  puVar4[0x10fa] = puVar4[0xccc];
  puVar4[0x10f7] = puVar4[0x8cb];
  puVar4[0x10f8] = puVar4[0x8cc];
  puVar4[0x10f5] = puVar4[0x8cd];
  puVar4[0x10f6] = puVar4[0x8ce];
  puVar4[0x10f3] = puVar4[0x8cf];
  puVar4[0x10f4] = puVar4[0x8d0];
  puVar4[0x10f2] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x10ef) = extraout_XMM0_Da_x01213;
  *(undefined4 *)((long)puVar4 + 0x877c) = extraout_XMM0_Db_x01213;
  *(undefined4 *)(puVar4 + 0x10f0) = extraout_XMM0_Dc_x01213;
  *(undefined4 *)((long)puVar4 + 0x8784) = extraout_XMM0_Dd_x01213;
  uVar2 = ((undefined8 *)puVar4[0x10f2])[1];
  puVar4[0x8d3] = *(undefined8 *)puVar4[0x10f2];
  puVar4[0x8d4] = uVar2;
  puVar4[-0x346] = 0x903599;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x8d1) = extraout_XMM0_Da_x01214;
  *(undefined4 *)((long)puVar4 + 0x468c) = extraout_XMM0_Db_x01214;
  *(undefined4 *)(puVar4 + 0x8d2) = extraout_XMM0_Dc_x01214;
  *(undefined4 *)((long)puVar4 + 0x4694) = extraout_XMM0_Dd_x01214;
  puVar4[-0x346] = 0x9035be;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9035de;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x10ed) = extraout_XMM0_Da_x01215;
  *(undefined4 *)((long)puVar4 + 0x876c) = extraout_XMM0_Db_x01215;
  *(undefined4 *)(puVar4 + 0x10ee) = extraout_XMM0_Dc_x01215;
  *(undefined4 *)((long)puVar4 + 0x8774) = extraout_XMM0_Dd_x01215;
  puVar4[-0x346] = 0x9035f3;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x8d5) = extraout_XMM0_Da_x01216;
  *(undefined4 *)((long)puVar4 + 0x46ac) = extraout_XMM0_Db_x01216;
  *(undefined4 *)(puVar4 + 0x8d6) = extraout_XMM0_Dc_x01216;
  *(undefined4 *)((long)puVar4 + 0x46b4) = extraout_XMM0_Dd_x01216;
  puVar4[-0x346] = 0x903618;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x903628;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x10eb) = extraout_XMM0_Da_x01217;
  *(undefined4 *)((long)puVar4 + 0x875c) = extraout_XMM0_Db_x01217;
  *(undefined4 *)(puVar4 + 0x10ec) = extraout_XMM0_Dc_x01217;
  *(undefined4 *)((long)puVar4 + 0x8764) = extraout_XMM0_Dd_x01217;
  puVar4[-0x346] = 0x903648;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x10fa];
  *puVar1 = extraout_XMM0_Da_x01218;
  puVar1[1] = extraout_XMM0_Db_x01218;
  puVar1[2] = extraout_XMM0_Dc_x01218;
  puVar1[3] = extraout_XMM0_Dd_x01218;
  puVar4[-0x346] = 0x903668;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x10f2];
  *puVar1 = extraout_XMM0_Da_x01219;
  puVar1[1] = extraout_XMM0_Db_x01219;
  puVar1[2] = extraout_XMM0_Dc_x01219;
  puVar1[3] = extraout_XMM0_Dd_x01219;
  puVar4[0x8df] = puVar4[0x1df9];
  puVar4[0x8e0] = puVar4[0x1dfa];
  puVar4[0x8e1] = puVar4[0x1df7];
  puVar4[0x8e2] = puVar4[0x1df8];
  puVar4[0x8e3] = puVar4[0x1df5];
  puVar4[0x8e4] = puVar4[0x1df6];
  puVar4[0x8e5] = puVar4[0x1df1];
  puVar4[0x8e6] = puVar4[0x1df2];
  puVar4[0x8e7] = puVar4[0x1def];
  puVar4[0x8e8] = puVar4[0x1df0];
  puVar4[0x8e9] = puVar4[0x1dfd];
  puVar4[0x8ea] = puVar4[0x1dfe];
  puVar4[-0x346] = 0x9036df;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x8dd) = extraout_XMM0_Da_x01220;
  *(undefined4 *)((long)puVar4 + 0x46ec) = extraout_XMM0_Db_x01220;
  *(undefined4 *)(puVar4 + 0x8de) = extraout_XMM0_Dc_x01220;
  *(undefined4 *)((long)puVar4 + 0x46f4) = extraout_XMM0_Dd_x01220;
  puVar4[-0x346] = 0x9036f4;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x8db) = extraout_XMM0_Da_x01221;
  *(undefined4 *)((long)puVar4 + 0x46dc) = extraout_XMM0_Db_x01221;
  *(undefined4 *)(puVar4 + 0x8dc) = extraout_XMM0_Dc_x01221;
  *(undefined4 *)((long)puVar4 + 0x46e4) = extraout_XMM0_Dd_x01221;
  *(undefined4 *)((long)puVar4 + 0x4d64) = 0x100;
  puVar4[-0x346] = 0x90370d;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x8d9) = extraout_XMM0_Da_x01222;
  *(undefined4 *)((long)puVar4 + 0x46cc) = extraout_XMM0_Db_x01222;
  *(undefined4 *)(puVar4 + 0x8da) = extraout_XMM0_Dc_x01222;
  *(undefined4 *)((long)puVar4 + 0x46d4) = extraout_XMM0_Dd_x01222;
  puVar4[-0x346] = 0x903722;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x903742;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x903752;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x10e9] = puVar4[0x8df];
  puVar4[0x10ea] = puVar4[0x8e0];
  puVar4[0x10e7] = puVar4[0x8e1];
  puVar4[0x10e8] = puVar4[0x8e2];
  puVar4[0x10e5] = puVar4[0x8e3];
  puVar4[0x10e6] = puVar4[0x8e4];
  puVar4[0x10e4] = puVar4[0xcec];
  puVar4[0x10e1] = puVar4[0x8e5];
  puVar4[0x10e2] = puVar4[0x8e6];
  puVar4[0x10df] = puVar4[0x8e7];
  puVar4[0x10e0] = puVar4[0x8e8];
  puVar4[0x10dd] = puVar4[0x8e9];
  puVar4[0x10de] = puVar4[0x8ea];
  puVar4[0x10dc] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x10d9) = extraout_XMM0_Da_x01223;
  *(undefined4 *)((long)puVar4 + 0x86cc) = extraout_XMM0_Db_x01223;
  *(undefined4 *)(puVar4 + 0x10da) = extraout_XMM0_Dc_x01223;
  *(undefined4 *)((long)puVar4 + 0x86d4) = extraout_XMM0_Dd_x01223;
  uVar2 = ((undefined8 *)puVar4[0x10dc])[1];
  puVar4[0x8ed] = *(undefined8 *)puVar4[0x10dc];
  puVar4[0x8ee] = uVar2;
  puVar4[-0x346] = 0x9037fa;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x8eb) = extraout_XMM0_Da_x01224;
  *(undefined4 *)((long)puVar4 + 0x475c) = extraout_XMM0_Db_x01224;
  *(undefined4 *)(puVar4 + 0x8ec) = extraout_XMM0_Dc_x01224;
  *(undefined4 *)((long)puVar4 + 0x4764) = extraout_XMM0_Dd_x01224;
  puVar4[-0x346] = 0x90381f;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90383f;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x10d7) = extraout_XMM0_Da_x01225;
  *(undefined4 *)((long)puVar4 + 0x86bc) = extraout_XMM0_Db_x01225;
  *(undefined4 *)(puVar4 + 0x10d8) = extraout_XMM0_Dc_x01225;
  *(undefined4 *)((long)puVar4 + 0x86c4) = extraout_XMM0_Dd_x01225;
  puVar4[-0x346] = 0x903854;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x8ef) = extraout_XMM0_Da_x01226;
  *(undefined4 *)((long)puVar4 + 0x477c) = extraout_XMM0_Db_x01226;
  *(undefined4 *)(puVar4 + 0x8f0) = extraout_XMM0_Dc_x01226;
  *(undefined4 *)((long)puVar4 + 0x4784) = extraout_XMM0_Dd_x01226;
  puVar4[-0x346] = 0x903879;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x903889;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x10d5) = extraout_XMM0_Da_x01227;
  *(undefined4 *)((long)puVar4 + 0x86ac) = extraout_XMM0_Db_x01227;
  *(undefined4 *)(puVar4 + 0x10d6) = extraout_XMM0_Dc_x01227;
  *(undefined4 *)((long)puVar4 + 0x86b4) = extraout_XMM0_Dd_x01227;
  puVar4[-0x346] = 0x9038a9;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x10e4];
  *puVar1 = extraout_XMM0_Da_x01228;
  puVar1[1] = extraout_XMM0_Db_x01228;
  puVar1[2] = extraout_XMM0_Dc_x01228;
  puVar1[3] = extraout_XMM0_Dd_x01228;
  puVar4[-0x346] = 0x9038c9;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x10dc];
  *puVar1 = extraout_XMM0_Da_x01229;
  puVar1[1] = extraout_XMM0_Db_x01229;
  puVar1[2] = extraout_XMM0_Dc_x01229;
  puVar1[3] = extraout_XMM0_Dd_x01229;
  puVar4[0x8f9] = puVar4[0x1dfb];
  puVar4[0x8fa] = puVar4[0x1dfc];
  puVar4[0x8fb] = puVar4[0x1df9];
  puVar4[0x8fc] = puVar4[0x1dfa];
  puVar4[0x8fd] = puVar4[0x1df7];
  puVar4[0x8fe] = puVar4[0x1df8];
  puVar4[0x8ff] = puVar4[0x1df3];
  puVar4[0x900] = puVar4[0x1df4];
  puVar4[0x901] = puVar4[0x1df1];
  puVar4[0x902] = puVar4[0x1df2];
  puVar4[0x903] = puVar4[0x1def];
  puVar4[0x904] = puVar4[0x1df0];
  puVar4[-0x346] = 0x903940;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x8f7) = extraout_XMM0_Da_x01230;
  *(undefined4 *)((long)puVar4 + 0x47bc) = extraout_XMM0_Db_x01230;
  *(undefined4 *)(puVar4 + 0x8f8) = extraout_XMM0_Dc_x01230;
  *(undefined4 *)((long)puVar4 + 0x47c4) = extraout_XMM0_Dd_x01230;
  puVar4[-0x346] = 0x903955;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x8f5) = extraout_XMM0_Da_x01231;
  *(undefined4 *)((long)puVar4 + 0x47ac) = extraout_XMM0_Db_x01231;
  *(undefined4 *)(puVar4 + 0x8f6) = extraout_XMM0_Dc_x01231;
  *(undefined4 *)((long)puVar4 + 0x47b4) = extraout_XMM0_Dd_x01231;
  puVar4[0x8f3] = puVar4[0x1ded];
  puVar4[0x8f4] = puVar4[0x1dee];
  puVar4[-0x346] = 0x903977;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x903997;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x9039a7;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x10d3] = puVar4[0x8f9];
  puVar4[0x10d4] = puVar4[0x8fa];
  puVar4[0x10d1] = puVar4[0x8fb];
  puVar4[0x10d2] = puVar4[0x8fc];
  puVar4[0x10cf] = puVar4[0x8fd];
  puVar4[0x10d0] = puVar4[0x8fe];
  puVar4[0x10ce] = puVar4[0xd0c];
  puVar4[0x10cb] = puVar4[0x8ff];
  puVar4[0x10cc] = puVar4[0x900];
  puVar4[0x10c9] = puVar4[0x901];
  puVar4[0x10ca] = puVar4[0x902];
  puVar4[0x10c7] = puVar4[0x903];
  puVar4[0x10c8] = puVar4[0x904];
  puVar4[0x10c6] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x10c3) = extraout_XMM0_Da_x01232;
  *(undefined4 *)((long)puVar4 + 0x861c) = extraout_XMM0_Db_x01232;
  *(undefined4 *)(puVar4 + 0x10c4) = extraout_XMM0_Dc_x01232;
  *(undefined4 *)((long)puVar4 + 0x8624) = extraout_XMM0_Dd_x01232;
  uVar2 = ((undefined8 *)puVar4[0x10c6])[1];
  puVar4[0x907] = *(undefined8 *)puVar4[0x10c6];
  puVar4[0x908] = uVar2;
  puVar4[-0x346] = 0x903a4f;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x905) = extraout_XMM0_Da_x01233;
  *(undefined4 *)((long)puVar4 + 0x482c) = extraout_XMM0_Db_x01233;
  *(undefined4 *)(puVar4 + 0x906) = extraout_XMM0_Dc_x01233;
  *(undefined4 *)((long)puVar4 + 0x4834) = extraout_XMM0_Dd_x01233;
  puVar4[-0x346] = 0x903a74;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x903a94;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x10c1) = extraout_XMM0_Da_x01234;
  *(undefined4 *)((long)puVar4 + 0x860c) = extraout_XMM0_Db_x01234;
  *(undefined4 *)(puVar4 + 0x10c2) = extraout_XMM0_Dc_x01234;
  *(undefined4 *)((long)puVar4 + 0x8614) = extraout_XMM0_Dd_x01234;
  puVar4[-0x346] = 0x903aa9;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x909) = extraout_XMM0_Da_x01235;
  *(undefined4 *)((long)puVar4 + 0x484c) = extraout_XMM0_Db_x01235;
  *(undefined4 *)(puVar4 + 0x90a) = extraout_XMM0_Dc_x01235;
  *(undefined4 *)((long)puVar4 + 0x4854) = extraout_XMM0_Dd_x01235;
  puVar4[-0x346] = 0x903ace;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x903ade;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x10bf) = extraout_XMM0_Da_x01236;
  *(undefined4 *)((long)puVar4 + 0x85fc) = extraout_XMM0_Db_x01236;
  *(undefined4 *)(puVar4 + 0x10c0) = extraout_XMM0_Dc_x01236;
  *(undefined4 *)((long)puVar4 + 0x8604) = extraout_XMM0_Dd_x01236;
  puVar4[-0x346] = 0x903afe;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x10ce];
  *puVar1 = extraout_XMM0_Da_x01237;
  puVar1[1] = extraout_XMM0_Db_x01237;
  puVar1[2] = extraout_XMM0_Dc_x01237;
  puVar1[3] = extraout_XMM0_Dd_x01237;
  puVar4[-0x346] = 0x903b1e;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x10c6];
  *puVar1 = extraout_XMM0_Da_x01238;
  puVar1[1] = extraout_XMM0_Db_x01238;
  puVar1[2] = extraout_XMM0_Dc_x01238;
  puVar1[3] = extraout_XMM0_Dd_x01238;
  puVar4[0x911] = puVar4[0x1dfd];
  puVar4[0x912] = puVar4[0x1dfe];
  puVar4[0x913] = puVar4[0x1dfb];
  puVar4[0x914] = puVar4[0x1dfc];
  puVar4[0x915] = puVar4[0x1df9];
  puVar4[0x916] = puVar4[0x1dfa];
  puVar4[0x917] = puVar4[0x1df5];
  puVar4[0x918] = puVar4[0x1df6];
  puVar4[0x919] = puVar4[0x1df3];
  puVar4[0x91a] = puVar4[0x1df4];
  puVar4[0x91b] = puVar4[0x1df1];
  puVar4[0x91c] = puVar4[0x1df2];
  puVar4[-0x346] = 0x903b95;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x90f) = extraout_XMM0_Da_x01239;
  *(undefined4 *)((long)puVar4 + 0x487c) = extraout_XMM0_Db_x01239;
  *(undefined4 *)(puVar4 + 0x910) = extraout_XMM0_Dc_x01239;
  *(undefined4 *)((long)puVar4 + 0x4884) = extraout_XMM0_Dd_x01239;
  puVar4[-0x346] = 0x903ba7;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x90d) = extraout_XMM0_Da_x01240;
  *(undefined4 *)((long)puVar4 + 0x486c) = extraout_XMM0_Db_x01240;
  *(undefined4 *)(puVar4 + 0x90e) = extraout_XMM0_Dc_x01240;
  *(undefined4 *)((long)puVar4 + 0x4874) = extraout_XMM0_Dd_x01240;
  puVar4[-0x346] = 0x903bbc;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x903bd4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342),
                      *(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1ddd) = extraout_XMM0_Da_x01241;
  *(undefined4 *)((long)puVar4 + 0xeeec) = extraout_XMM0_Db_x01241;
  *(undefined4 *)(puVar4 + 0x1dde) = extraout_XMM0_Dc_x01241;
  *(undefined4 *)((long)puVar4 + 0xeef4) = extraout_XMM0_Dd_x01241;
  puVar4[-0x346] = 0x903bec;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x10bd] = puVar4[0x911];
  puVar4[0x10be] = puVar4[0x912];
  puVar4[0x10bb] = puVar4[0x913];
  puVar4[0x10bc] = puVar4[0x914];
  puVar4[0x10b9] = puVar4[0x915];
  puVar4[0x10ba] = puVar4[0x916];
  puVar4[0x10b8] = puVar4[0xcb6];
  puVar4[0x10b5] = puVar4[0x917];
  puVar4[0x10b6] = puVar4[0x918];
  puVar4[0x10b3] = puVar4[0x919];
  puVar4[0x10b4] = puVar4[0x91a];
  puVar4[0x10b1] = puVar4[0x91b];
  puVar4[0x10b2] = puVar4[0x91c];
  puVar4[0x10b0] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0x10ad) = extraout_XMM0_Da_x01242;
  *(undefined4 *)((long)puVar4 + 0x856c) = extraout_XMM0_Db_x01242;
  *(undefined4 *)(puVar4 + 0x10ae) = extraout_XMM0_Dc_x01242;
  *(undefined4 *)((long)puVar4 + 0x8574) = extraout_XMM0_Dd_x01242;
  uVar2 = ((undefined8 *)puVar4[0x10b0])[1];
  puVar4[0x91f] = *(undefined8 *)puVar4[0x10b0];
  puVar4[0x920] = uVar2;
  puVar4[-0x346] = 0x903c94;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x91d) = extraout_XMM0_Da_x01243;
  *(undefined4 *)((long)puVar4 + 0x48ec) = extraout_XMM0_Db_x01243;
  *(undefined4 *)(puVar4 + 0x91e) = extraout_XMM0_Dc_x01243;
  *(undefined4 *)((long)puVar4 + 0x48f4) = extraout_XMM0_Dd_x01243;
  puVar4[-0x346] = 0x903cb9;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x903cd9;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x10ab) = extraout_XMM0_Da_x01244;
  *(undefined4 *)((long)puVar4 + 0x855c) = extraout_XMM0_Db_x01244;
  *(undefined4 *)(puVar4 + 0x10ac) = extraout_XMM0_Dc_x01244;
  *(undefined4 *)((long)puVar4 + 0x8564) = extraout_XMM0_Dd_x01244;
  puVar4[-0x346] = 0x903cee;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x921) = extraout_XMM0_Da_x01245;
  *(undefined4 *)((long)puVar4 + 0x490c) = extraout_XMM0_Db_x01245;
  *(undefined4 *)(puVar4 + 0x922) = extraout_XMM0_Dc_x01245;
  *(undefined4 *)((long)puVar4 + 0x4914) = extraout_XMM0_Dd_x01245;
  puVar4[-0x346] = 0x903d13;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x903d23;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x10a9) = extraout_XMM0_Da_x01246;
  *(undefined4 *)((long)puVar4 + 0x854c) = extraout_XMM0_Db_x01246;
  *(undefined4 *)(puVar4 + 0x10aa) = extraout_XMM0_Dc_x01246;
  *(undefined4 *)((long)puVar4 + 0x8554) = extraout_XMM0_Dd_x01246;
  puVar4[-0x346] = 0x903d43;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x10b8];
  *puVar1 = extraout_XMM0_Da_x01247;
  puVar1[1] = extraout_XMM0_Db_x01247;
  puVar1[2] = extraout_XMM0_Dc_x01247;
  puVar1[3] = extraout_XMM0_Dd_x01247;
  puVar4[-0x346] = 0x903d63;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x10b0];
  *puVar1 = extraout_XMM0_Da_x01248;
  puVar1[1] = extraout_XMM0_Db_x01248;
  puVar1[2] = extraout_XMM0_Dc_x01248;
  puVar1[3] = extraout_XMM0_Dd_x01248;
  puVar4[0x927] = puVar4[0x1def];
  puVar4[0x928] = puVar4[0x1df0];
  puVar4[0x929] = puVar4[0x1dfd];
  puVar4[0x92a] = puVar4[0x1dfe];
  puVar4[0x92b] = puVar4[0x1dfb];
  puVar4[0x92c] = puVar4[0x1dfc];
  puVar4[0x92d] = puVar4[0x1df7];
  puVar4[0x92e] = puVar4[0x1df8];
  puVar4[0x92f] = puVar4[0x1df5];
  puVar4[0x930] = puVar4[0x1df6];
  puVar4[0x931] = puVar4[0x1df3];
  puVar4[0x932] = puVar4[0x1df4];
  puVar4[-0x346] = 0x903dda;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x925) = extraout_XMM0_Da_x01249;
  *(undefined4 *)((long)puVar4 + 0x492c) = extraout_XMM0_Db_x01249;
  *(undefined4 *)(puVar4 + 0x926) = extraout_XMM0_Dc_x01249;
  *(undefined4 *)((long)puVar4 + 0x4934) = extraout_XMM0_Dd_x01249;
  puVar4[-0x346] = 0x903def;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x903dfc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1ddb) = extraout_XMM0_Da_x01250;
  *(undefined4 *)((long)puVar4 + 0xeedc) = extraout_XMM0_Db_x01250;
  *(undefined4 *)(puVar4 + 0x1ddc) = extraout_XMM0_Dc_x01250;
  *(undefined4 *)((long)puVar4 + 0xeee4) = extraout_XMM0_Dd_x01250;
  puVar4[-0x346] = 0x903e14;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x10a7] = puVar4[0x927];
  puVar4[0x10a8] = puVar4[0x928];
  puVar4[0x10a5] = puVar4[0x929];
  puVar4[0x10a6] = puVar4[0x92a];
  puVar4[0x10a3] = puVar4[0x92b];
  puVar4[0x10a4] = puVar4[0x92c];
  puVar4[0x10a2] = puVar4[0xcd4];
  puVar4[0x109f] = puVar4[0x92d];
  puVar4[0x10a0] = puVar4[0x92e];
  puVar4[0x109d] = puVar4[0x92f];
  puVar4[0x109e] = puVar4[0x930];
  puVar4[0x109b] = puVar4[0x931];
  puVar4[0x109c] = puVar4[0x932];
  puVar4[0x109a] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0x1097) = extraout_XMM0_Da_x01251;
  *(undefined4 *)((long)puVar4 + 0x84bc) = extraout_XMM0_Db_x01251;
  *(undefined4 *)(puVar4 + 0x1098) = extraout_XMM0_Dc_x01251;
  *(undefined4 *)((long)puVar4 + 0x84c4) = extraout_XMM0_Dd_x01251;
  uVar2 = ((undefined8 *)puVar4[0x109a])[1];
  puVar4[0x935] = *(undefined8 *)puVar4[0x109a];
  puVar4[0x936] = uVar2;
  puVar4[-0x346] = 0x903ebc;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x933) = extraout_XMM0_Da_x01252;
  *(undefined4 *)((long)puVar4 + 0x499c) = extraout_XMM0_Db_x01252;
  *(undefined4 *)(puVar4 + 0x934) = extraout_XMM0_Dc_x01252;
  *(undefined4 *)((long)puVar4 + 0x49a4) = extraout_XMM0_Dd_x01252;
  puVar4[-0x346] = 0x903ee1;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x903f01;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1095) = extraout_XMM0_Da_x01253;
  *(undefined4 *)((long)puVar4 + 0x84ac) = extraout_XMM0_Db_x01253;
  *(undefined4 *)(puVar4 + 0x1096) = extraout_XMM0_Dc_x01253;
  *(undefined4 *)((long)puVar4 + 0x84b4) = extraout_XMM0_Dd_x01253;
  puVar4[-0x346] = 0x903f16;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x937) = extraout_XMM0_Da_x01254;
  *(undefined4 *)((long)puVar4 + 0x49bc) = extraout_XMM0_Db_x01254;
  *(undefined4 *)(puVar4 + 0x938) = extraout_XMM0_Dc_x01254;
  *(undefined4 *)((long)puVar4 + 0x49c4) = extraout_XMM0_Dd_x01254;
  puVar4[-0x346] = 0x903f3b;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x903f4b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1093) = extraout_XMM0_Da_x01255;
  *(undefined4 *)((long)puVar4 + 0x849c) = extraout_XMM0_Db_x01255;
  *(undefined4 *)(puVar4 + 0x1094) = extraout_XMM0_Dc_x01255;
  *(undefined4 *)((long)puVar4 + 0x84a4) = extraout_XMM0_Dd_x01255;
  puVar4[-0x346] = 0x903f6b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x10a2];
  *puVar1 = extraout_XMM0_Da_x01256;
  puVar1[1] = extraout_XMM0_Db_x01256;
  puVar1[2] = extraout_XMM0_Dc_x01256;
  puVar1[3] = extraout_XMM0_Dd_x01256;
  puVar4[-0x346] = 0x903f8b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x109a];
  *puVar1 = extraout_XMM0_Da_x01257;
  puVar1[1] = extraout_XMM0_Db_x01257;
  puVar1[2] = extraout_XMM0_Dc_x01257;
  puVar1[3] = extraout_XMM0_Dd_x01257;
  puVar4[0x93d] = puVar4[0x1df1];
  puVar4[0x93e] = puVar4[0x1df2];
  puVar4[0x93f] = puVar4[0x1def];
  puVar4[0x940] = puVar4[0x1df0];
  puVar4[0x941] = puVar4[0x1dfd];
  puVar4[0x942] = puVar4[0x1dfe];
  puVar4[0x943] = puVar4[0x1df9];
  puVar4[0x944] = puVar4[0x1dfa];
  puVar4[0x945] = puVar4[0x1df7];
  puVar4[0x946] = puVar4[0x1df8];
  puVar4[0x947] = puVar4[0x1df5];
  puVar4[0x948] = puVar4[0x1df6];
  puVar4[-0x346] = 0x904002;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x93b) = extraout_XMM0_Da_x01258;
  *(undefined4 *)((long)puVar4 + 0x49dc) = extraout_XMM0_Db_x01258;
  *(undefined4 *)(puVar4 + 0x93c) = extraout_XMM0_Dc_x01258;
  *(undefined4 *)((long)puVar4 + 0x49e4) = extraout_XMM0_Dd_x01258;
  puVar4[-0x346] = 0x904017;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x904024;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1dd9) = extraout_XMM0_Da_x01259;
  *(undefined4 *)((long)puVar4 + 0xeecc) = extraout_XMM0_Db_x01259;
  *(undefined4 *)(puVar4 + 0x1dda) = extraout_XMM0_Dc_x01259;
  *(undefined4 *)((long)puVar4 + 0xeed4) = extraout_XMM0_Dd_x01259;
  puVar4[-0x346] = 0x90403c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1091] = puVar4[0x93d];
  puVar4[0x1092] = puVar4[0x93e];
  puVar4[0x108f] = puVar4[0x93f];
  puVar4[0x1090] = puVar4[0x940];
  puVar4[0x108d] = puVar4[0x941];
  puVar4[0x108e] = puVar4[0x942];
  puVar4[0x108c] = puVar4[0xcf4];
  puVar4[0x1089] = puVar4[0x943];
  puVar4[0x108a] = puVar4[0x944];
  puVar4[0x1087] = puVar4[0x945];
  puVar4[0x1088] = puVar4[0x946];
  puVar4[0x1085] = puVar4[0x947];
  puVar4[0x1086] = puVar4[0x948];
  puVar4[0x1084] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0x1081) = extraout_XMM0_Da_x01260;
  *(undefined4 *)((long)puVar4 + 0x840c) = extraout_XMM0_Db_x01260;
  *(undefined4 *)(puVar4 + 0x1082) = extraout_XMM0_Dc_x01260;
  *(undefined4 *)((long)puVar4 + 0x8414) = extraout_XMM0_Dd_x01260;
  uVar2 = ((undefined8 *)puVar4[0x1084])[1];
  puVar4[0x94b] = *(undefined8 *)puVar4[0x1084];
  puVar4[0x94c] = uVar2;
  puVar4[-0x346] = 0x9040e4;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x949) = extraout_XMM0_Da_x01261;
  *(undefined4 *)((long)puVar4 + 0x4a4c) = extraout_XMM0_Db_x01261;
  *(undefined4 *)(puVar4 + 0x94a) = extraout_XMM0_Dc_x01261;
  *(undefined4 *)((long)puVar4 + 0x4a54) = extraout_XMM0_Dd_x01261;
  puVar4[-0x346] = 0x904109;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x904129;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x107f) = extraout_XMM0_Da_x01262;
  *(undefined4 *)((long)puVar4 + 0x83fc) = extraout_XMM0_Db_x01262;
  *(undefined4 *)(puVar4 + 0x1080) = extraout_XMM0_Dc_x01262;
  *(undefined4 *)((long)puVar4 + 0x8404) = extraout_XMM0_Dd_x01262;
  puVar4[-0x346] = 0x90413e;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x94d) = extraout_XMM0_Da_x01263;
  *(undefined4 *)((long)puVar4 + 0x4a6c) = extraout_XMM0_Db_x01263;
  *(undefined4 *)(puVar4 + 0x94e) = extraout_XMM0_Dc_x01263;
  *(undefined4 *)((long)puVar4 + 0x4a74) = extraout_XMM0_Dd_x01263;
  puVar4[-0x346] = 0x904163;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x904173;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x107d) = extraout_XMM0_Da_x01264;
  *(undefined4 *)((long)puVar4 + 0x83ec) = extraout_XMM0_Db_x01264;
  *(undefined4 *)(puVar4 + 0x107e) = extraout_XMM0_Dc_x01264;
  *(undefined4 *)((long)puVar4 + 0x83f4) = extraout_XMM0_Dd_x01264;
  puVar4[-0x346] = 0x904193;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x108c];
  *puVar1 = extraout_XMM0_Da_x01265;
  puVar1[1] = extraout_XMM0_Db_x01265;
  puVar1[2] = extraout_XMM0_Dc_x01265;
  puVar1[3] = extraout_XMM0_Dd_x01265;
  puVar4[-0x346] = 0x9041b3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1084];
  *puVar1 = extraout_XMM0_Da_x01266;
  puVar1[1] = extraout_XMM0_Db_x01266;
  puVar1[2] = extraout_XMM0_Dc_x01266;
  puVar1[3] = extraout_XMM0_Dd_x01266;
  puVar4[0x953] = puVar4[0x1df3];
  puVar4[0x954] = puVar4[0x1df4];
  puVar4[0x955] = puVar4[0x1df1];
  puVar4[0x956] = puVar4[0x1df2];
  puVar4[0x957] = puVar4[0x1def];
  puVar4[0x958] = puVar4[0x1df0];
  puVar4[0x959] = puVar4[0x1dfb];
  puVar4[0x95a] = puVar4[0x1dfc];
  puVar4[0x95b] = puVar4[0x1df9];
  puVar4[0x95c] = puVar4[0x1dfa];
  puVar4[0x95d] = puVar4[0x1df7];
  puVar4[0x95e] = puVar4[0x1df8];
  puVar4[-0x346] = 0x90422a;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x951) = extraout_XMM0_Da_x01267;
  *(undefined4 *)((long)puVar4 + 0x4a8c) = extraout_XMM0_Db_x01267;
  *(undefined4 *)(puVar4 + 0x952) = extraout_XMM0_Dc_x01267;
  *(undefined4 *)((long)puVar4 + 0x4a94) = extraout_XMM0_Dd_x01267;
  puVar4[-0x346] = 0x90423f;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x90424c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1dd7) = extraout_XMM0_Da_x01268;
  *(undefined4 *)((long)puVar4 + 0xeebc) = extraout_XMM0_Db_x01268;
  *(undefined4 *)(puVar4 + 0x1dd8) = extraout_XMM0_Dc_x01268;
  *(undefined4 *)((long)puVar4 + 0xeec4) = extraout_XMM0_Dd_x01268;
  puVar4[-0x346] = 0x904264;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x107b] = puVar4[0x953];
  puVar4[0x107c] = puVar4[0x954];
  puVar4[0x1079] = puVar4[0x955];
  puVar4[0x107a] = puVar4[0x956];
  puVar4[0x1077] = puVar4[0x957];
  puVar4[0x1078] = puVar4[0x958];
  puVar4[0x1076] = puVar4[0xd14];
  puVar4[0x1073] = puVar4[0x959];
  puVar4[0x1074] = puVar4[0x95a];
  puVar4[0x1071] = puVar4[0x95b];
  puVar4[0x1072] = puVar4[0x95c];
  puVar4[0x106f] = puVar4[0x95d];
  puVar4[0x1070] = puVar4[0x95e];
  puVar4[0x106e] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0x106b) = extraout_XMM0_Da_x01269;
  *(undefined4 *)((long)puVar4 + 0x835c) = extraout_XMM0_Db_x01269;
  *(undefined4 *)(puVar4 + 0x106c) = extraout_XMM0_Dc_x01269;
  *(undefined4 *)((long)puVar4 + 0x8364) = extraout_XMM0_Dd_x01269;
  uVar2 = ((undefined8 *)puVar4[0x106e])[1];
  puVar4[0x961] = *(undefined8 *)puVar4[0x106e];
  puVar4[0x962] = uVar2;
  puVar4[-0x346] = 0x90430c;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x95f) = extraout_XMM0_Da_x01270;
  *(undefined4 *)((long)puVar4 + 0x4afc) = extraout_XMM0_Db_x01270;
  *(undefined4 *)(puVar4 + 0x960) = extraout_XMM0_Dc_x01270;
  *(undefined4 *)((long)puVar4 + 0x4b04) = extraout_XMM0_Dd_x01270;
  puVar4[-0x346] = 0x904331;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x904351;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1069) = extraout_XMM0_Da_x01271;
  *(undefined4 *)((long)puVar4 + 0x834c) = extraout_XMM0_Db_x01271;
  *(undefined4 *)(puVar4 + 0x106a) = extraout_XMM0_Dc_x01271;
  *(undefined4 *)((long)puVar4 + 0x8354) = extraout_XMM0_Dd_x01271;
  puVar4[-0x346] = 0x904366;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x963) = extraout_XMM0_Da_x01272;
  *(undefined4 *)((long)puVar4 + 0x4b1c) = extraout_XMM0_Db_x01272;
  *(undefined4 *)(puVar4 + 0x964) = extraout_XMM0_Dc_x01272;
  *(undefined4 *)((long)puVar4 + 0x4b24) = extraout_XMM0_Dd_x01272;
  puVar4[-0x346] = 0x90438b;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90439b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1067) = extraout_XMM0_Da_x01273;
  *(undefined4 *)((long)puVar4 + 0x833c) = extraout_XMM0_Db_x01273;
  *(undefined4 *)(puVar4 + 0x1068) = extraout_XMM0_Dc_x01273;
  *(undefined4 *)((long)puVar4 + 0x8344) = extraout_XMM0_Dd_x01273;
  puVar4[-0x346] = 0x9043bb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1076];
  *puVar1 = extraout_XMM0_Da_x01274;
  puVar1[1] = extraout_XMM0_Db_x01274;
  puVar1[2] = extraout_XMM0_Dc_x01274;
  puVar1[3] = extraout_XMM0_Dd_x01274;
  puVar4[-0x346] = 0x9043db;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x106e];
  *puVar1 = extraout_XMM0_Da_x01275;
  puVar1[1] = extraout_XMM0_Db_x01275;
  puVar1[2] = extraout_XMM0_Dc_x01275;
  puVar1[3] = extraout_XMM0_Dd_x01275;
  puVar4[0x969] = puVar4[0x1df5];
  puVar4[0x96a] = puVar4[0x1df6];
  puVar4[0x96b] = puVar4[0x1df3];
  puVar4[0x96c] = puVar4[0x1df4];
  puVar4[0x96d] = puVar4[0x1df1];
  puVar4[0x96e] = puVar4[0x1df2];
  puVar4[0x96f] = puVar4[0x1dfd];
  puVar4[0x970] = puVar4[0x1dfe];
  puVar4[0x971] = puVar4[0x1dfb];
  puVar4[0x972] = puVar4[0x1dfc];
  puVar4[0x973] = puVar4[0x1df9];
  puVar4[0x974] = puVar4[0x1dfa];
  puVar4[-0x346] = 0x904452;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x967) = extraout_XMM0_Da_x01276;
  *(undefined4 *)((long)puVar4 + 0x4b3c) = extraout_XMM0_Db_x01276;
  *(undefined4 *)(puVar4 + 0x968) = extraout_XMM0_Dc_x01276;
  *(undefined4 *)((long)puVar4 + 0x4b44) = extraout_XMM0_Dd_x01276;
  puVar4[-0x346] = 0x904467;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x904474;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1dd5) = extraout_XMM0_Da_x01277;
  *(undefined4 *)((long)puVar4 + 0xeeac) = extraout_XMM0_Db_x01277;
  *(undefined4 *)(puVar4 + 0x1dd6) = extraout_XMM0_Dc_x01277;
  *(undefined4 *)((long)puVar4 + 0xeeb4) = extraout_XMM0_Dd_x01277;
  puVar4[-0x346] = 0x90448c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1065] = puVar4[0x969];
  puVar4[0x1066] = puVar4[0x96a];
  puVar4[0x1063] = puVar4[0x96b];
  puVar4[0x1064] = puVar4[0x96c];
  puVar4[0x1061] = puVar4[0x96d];
  puVar4[0x1062] = puVar4[0x96e];
  puVar4[0x1060] = puVar4[0xcae];
  puVar4[0x105d] = puVar4[0x96f];
  puVar4[0x105e] = puVar4[0x970];
  puVar4[0x105b] = puVar4[0x971];
  puVar4[0x105c] = puVar4[0x972];
  puVar4[0x1059] = puVar4[0x973];
  puVar4[0x105a] = puVar4[0x974];
  puVar4[0x1058] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0x1055) = extraout_XMM0_Da_x01278;
  *(undefined4 *)((long)puVar4 + 0x82ac) = extraout_XMM0_Db_x01278;
  *(undefined4 *)(puVar4 + 0x1056) = extraout_XMM0_Dc_x01278;
  *(undefined4 *)((long)puVar4 + 0x82b4) = extraout_XMM0_Dd_x01278;
  uVar2 = ((undefined8 *)puVar4[0x1058])[1];
  puVar4[0x977] = *(undefined8 *)puVar4[0x1058];
  puVar4[0x978] = uVar2;
  puVar4[-0x346] = 0x904534;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x975) = extraout_XMM0_Da_x01279;
  *(undefined4 *)((long)puVar4 + 0x4bac) = extraout_XMM0_Db_x01279;
  *(undefined4 *)(puVar4 + 0x976) = extraout_XMM0_Dc_x01279;
  *(undefined4 *)((long)puVar4 + 0x4bb4) = extraout_XMM0_Dd_x01279;
  puVar4[-0x346] = 0x904559;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x904579;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1053) = extraout_XMM0_Da_x01280;
  *(undefined4 *)((long)puVar4 + 0x829c) = extraout_XMM0_Db_x01280;
  *(undefined4 *)(puVar4 + 0x1054) = extraout_XMM0_Dc_x01280;
  *(undefined4 *)((long)puVar4 + 0x82a4) = extraout_XMM0_Dd_x01280;
  puVar4[-0x346] = 0x90458e;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x979) = extraout_XMM0_Da_x01281;
  *(undefined4 *)((long)puVar4 + 0x4bcc) = extraout_XMM0_Db_x01281;
  *(undefined4 *)(puVar4 + 0x97a) = extraout_XMM0_Dc_x01281;
  *(undefined4 *)((long)puVar4 + 0x4bd4) = extraout_XMM0_Dd_x01281;
  puVar4[-0x346] = 0x9045b3;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9045c3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1051) = extraout_XMM0_Da_x01282;
  *(undefined4 *)((long)puVar4 + 0x828c) = extraout_XMM0_Db_x01282;
  *(undefined4 *)(puVar4 + 0x1052) = extraout_XMM0_Dc_x01282;
  *(undefined4 *)((long)puVar4 + 0x8294) = extraout_XMM0_Dd_x01282;
  puVar4[-0x346] = 0x9045e3;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1060];
  *puVar1 = extraout_XMM0_Da_x01283;
  puVar1[1] = extraout_XMM0_Db_x01283;
  puVar1[2] = extraout_XMM0_Dc_x01283;
  puVar1[3] = extraout_XMM0_Dd_x01283;
  puVar4[-0x346] = 0x904603;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1058];
  *puVar1 = extraout_XMM0_Da_x01284;
  puVar1[1] = extraout_XMM0_Db_x01284;
  puVar1[2] = extraout_XMM0_Dc_x01284;
  puVar1[3] = extraout_XMM0_Dd_x01284;
  puVar4[0x97f] = puVar4[0x1df7];
  puVar4[0x980] = puVar4[0x1df8];
  puVar4[0x981] = puVar4[0x1df5];
  puVar4[0x982] = puVar4[0x1df6];
  puVar4[0x983] = puVar4[0x1df3];
  puVar4[0x984] = puVar4[0x1df4];
  puVar4[0x985] = puVar4[0x1def];
  puVar4[0x986] = puVar4[0x1df0];
  puVar4[0x987] = puVar4[0x1dfd];
  puVar4[0x988] = puVar4[0x1dfe];
  puVar4[0x989] = puVar4[0x1dfb];
  puVar4[0x98a] = puVar4[0x1dfc];
  puVar4[-0x346] = 0x90467a;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x97d) = extraout_XMM0_Da_x01285;
  *(undefined4 *)((long)puVar4 + 0x4bec) = extraout_XMM0_Db_x01285;
  *(undefined4 *)(puVar4 + 0x97e) = extraout_XMM0_Dc_x01285;
  *(undefined4 *)((long)puVar4 + 0x4bf4) = extraout_XMM0_Dd_x01285;
  puVar4[-0x346] = 0x90468f;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x90469c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1dd3) = extraout_XMM0_Da_x01286;
  *(undefined4 *)((long)puVar4 + 0xee9c) = extraout_XMM0_Db_x01286;
  *(undefined4 *)(puVar4 + 0x1dd4) = extraout_XMM0_Dc_x01286;
  *(undefined4 *)((long)puVar4 + 0xeea4) = extraout_XMM0_Dd_x01286;
  puVar4[-0x346] = 0x9046b4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x104f] = puVar4[0x97f];
  puVar4[0x1050] = puVar4[0x980];
  puVar4[0x104d] = puVar4[0x981];
  puVar4[0x104e] = puVar4[0x982];
  puVar4[0x104b] = puVar4[0x983];
  puVar4[0x104c] = puVar4[0x984];
  puVar4[0x104a] = puVar4[0xccc];
  puVar4[0x1047] = puVar4[0x985];
  puVar4[0x1048] = puVar4[0x986];
  puVar4[0x1045] = puVar4[0x987];
  puVar4[0x1046] = puVar4[0x988];
  puVar4[0x1043] = puVar4[0x989];
  puVar4[0x1044] = puVar4[0x98a];
  puVar4[0x1042] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0x103f) = extraout_XMM0_Da_x01287;
  *(undefined4 *)((long)puVar4 + 0x81fc) = extraout_XMM0_Db_x01287;
  *(undefined4 *)(puVar4 + 0x1040) = extraout_XMM0_Dc_x01287;
  *(undefined4 *)((long)puVar4 + 0x8204) = extraout_XMM0_Dd_x01287;
  uVar2 = ((undefined8 *)puVar4[0x1042])[1];
  puVar4[0x98d] = *(undefined8 *)puVar4[0x1042];
  puVar4[0x98e] = uVar2;
  puVar4[-0x346] = 0x90475c;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x98b) = extraout_XMM0_Da_x01288;
  *(undefined4 *)((long)puVar4 + 0x4c5c) = extraout_XMM0_Db_x01288;
  *(undefined4 *)(puVar4 + 0x98c) = extraout_XMM0_Dc_x01288;
  *(undefined4 *)((long)puVar4 + 0x4c64) = extraout_XMM0_Dd_x01288;
  puVar4[-0x346] = 0x904781;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9047a1;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x103d) = extraout_XMM0_Da_x01289;
  *(undefined4 *)((long)puVar4 + 0x81ec) = extraout_XMM0_Db_x01289;
  *(undefined4 *)(puVar4 + 0x103e) = extraout_XMM0_Dc_x01289;
  *(undefined4 *)((long)puVar4 + 0x81f4) = extraout_XMM0_Dd_x01289;
  puVar4[-0x346] = 0x9047b6;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x98f) = extraout_XMM0_Da_x01290;
  *(undefined4 *)((long)puVar4 + 0x4c7c) = extraout_XMM0_Db_x01290;
  *(undefined4 *)(puVar4 + 0x990) = extraout_XMM0_Dc_x01290;
  *(undefined4 *)((long)puVar4 + 0x4c84) = extraout_XMM0_Dd_x01290;
  puVar4[-0x346] = 0x9047db;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9047eb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x103b) = extraout_XMM0_Da_x01291;
  *(undefined4 *)((long)puVar4 + 0x81dc) = extraout_XMM0_Db_x01291;
  *(undefined4 *)(puVar4 + 0x103c) = extraout_XMM0_Dc_x01291;
  *(undefined4 *)((long)puVar4 + 0x81e4) = extraout_XMM0_Dd_x01291;
  puVar4[-0x346] = 0x90480b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x104a];
  *puVar1 = extraout_XMM0_Da_x01292;
  puVar1[1] = extraout_XMM0_Db_x01292;
  puVar1[2] = extraout_XMM0_Dc_x01292;
  puVar1[3] = extraout_XMM0_Dd_x01292;
  puVar4[-0x346] = 0x90482b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1042];
  *puVar1 = extraout_XMM0_Da_x01293;
  puVar1[1] = extraout_XMM0_Db_x01293;
  puVar1[2] = extraout_XMM0_Dc_x01293;
  puVar1[3] = extraout_XMM0_Dd_x01293;
  puVar4[0x999] = puVar4[0x1df9];
  puVar4[0x99a] = puVar4[0x1dfa];
  puVar4[0x99b] = puVar4[0x1df7];
  puVar4[0x99c] = puVar4[0x1df8];
  puVar4[0x99d] = puVar4[0x1df5];
  puVar4[0x99e] = puVar4[0x1df6];
  puVar4[0x99f] = puVar4[0x1df1];
  puVar4[0x9a0] = puVar4[0x1df2];
  puVar4[0x9a1] = puVar4[0x1def];
  puVar4[0x9a2] = puVar4[0x1df0];
  puVar4[0x9a3] = puVar4[0x1dfd];
  puVar4[0x9a4] = puVar4[0x1dfe];
  puVar4[-0x346] = 0x9048a2;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x997) = extraout_XMM0_Da_x01294;
  *(undefined4 *)((long)puVar4 + 0x4cbc) = extraout_XMM0_Db_x01294;
  *(undefined4 *)(puVar4 + 0x998) = extraout_XMM0_Dc_x01294;
  *(undefined4 *)((long)puVar4 + 0x4cc4) = extraout_XMM0_Dd_x01294;
  puVar4[-0x346] = 0x9048b7;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x995) = extraout_XMM0_Da_x01295;
  *(undefined4 *)((long)puVar4 + 0x4cac) = extraout_XMM0_Db_x01295;
  *(undefined4 *)(puVar4 + 0x996) = extraout_XMM0_Dc_x01295;
  *(undefined4 *)((long)puVar4 + 0x4cb4) = extraout_XMM0_Dd_x01295;
  puVar4[0x993] = puVar4[0x1ddf];
  puVar4[0x994] = puVar4[0x1de0];
  puVar4[-0x346] = 0x9048d9;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x9048f1;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342),
                      *(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1dd1) = extraout_XMM0_Da_x01296;
  *(undefined4 *)((long)puVar4 + 0xee8c) = extraout_XMM0_Db_x01296;
  *(undefined4 *)(puVar4 + 0x1dd2) = extraout_XMM0_Dc_x01296;
  *(undefined4 *)((long)puVar4 + 0xee94) = extraout_XMM0_Dd_x01296;
  puVar4[-0x346] = 0x904909;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1039] = puVar4[0x999];
  puVar4[0x103a] = puVar4[0x99a];
  puVar4[0x1037] = puVar4[0x99b];
  puVar4[0x1038] = puVar4[0x99c];
  puVar4[0x1035] = puVar4[0x99d];
  puVar4[0x1036] = puVar4[0x99e];
  puVar4[0x1034] = puVar4[0xcec];
  puVar4[0x1031] = puVar4[0x99f];
  puVar4[0x1032] = puVar4[0x9a0];
  puVar4[0x102f] = puVar4[0x9a1];
  puVar4[0x1030] = puVar4[0x9a2];
  puVar4[0x102d] = puVar4[0x9a3];
  puVar4[0x102e] = puVar4[0x9a4];
  puVar4[0x102c] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0x1029) = extraout_XMM0_Da_x01297;
  *(undefined4 *)((long)puVar4 + 0x814c) = extraout_XMM0_Db_x01297;
  *(undefined4 *)(puVar4 + 0x102a) = extraout_XMM0_Dc_x01297;
  *(undefined4 *)((long)puVar4 + 0x8154) = extraout_XMM0_Dd_x01297;
  uVar2 = ((undefined8 *)puVar4[0x102c])[1];
  puVar4[0x9a7] = *(undefined8 *)puVar4[0x102c];
  puVar4[0x9a8] = uVar2;
  puVar4[-0x346] = 0x9049b1;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x9a5) = extraout_XMM0_Da_x01298;
  *(undefined4 *)((long)puVar4 + 0x4d2c) = extraout_XMM0_Db_x01298;
  *(undefined4 *)(puVar4 + 0x9a6) = extraout_XMM0_Dc_x01298;
  *(undefined4 *)((long)puVar4 + 0x4d34) = extraout_XMM0_Dd_x01298;
  puVar4[-0x346] = 0x9049d6;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9049f6;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1027) = extraout_XMM0_Da_x01299;
  *(undefined4 *)((long)puVar4 + 0x813c) = extraout_XMM0_Db_x01299;
  *(undefined4 *)(puVar4 + 0x1028) = extraout_XMM0_Dc_x01299;
  *(undefined4 *)((long)puVar4 + 0x8144) = extraout_XMM0_Dd_x01299;
  puVar4[-0x346] = 0x904a0b;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x9a9) = extraout_XMM0_Da_x01300;
  *(undefined4 *)((long)puVar4 + 0x4d4c) = extraout_XMM0_Db_x01300;
  *(undefined4 *)(puVar4 + 0x9aa) = extraout_XMM0_Dc_x01300;
  *(undefined4 *)((long)puVar4 + 0x4d54) = extraout_XMM0_Dd_x01300;
  puVar4[-0x346] = 0x904a30;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x904a40;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x1025) = extraout_XMM0_Da_x01301;
  *(undefined4 *)((long)puVar4 + 0x812c) = extraout_XMM0_Db_x01301;
  *(undefined4 *)(puVar4 + 0x1026) = extraout_XMM0_Dc_x01301;
  *(undefined4 *)((long)puVar4 + 0x8134) = extraout_XMM0_Dd_x01301;
  puVar4[-0x346] = 0x904a60;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1034];
  *puVar1 = extraout_XMM0_Da_x01302;
  puVar1[1] = extraout_XMM0_Db_x01302;
  puVar1[2] = extraout_XMM0_Dc_x01302;
  puVar1[3] = extraout_XMM0_Dd_x01302;
  puVar4[-0x346] = 0x904a80;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x102c];
  *puVar1 = extraout_XMM0_Da_x01303;
  puVar1[1] = extraout_XMM0_Db_x01303;
  puVar1[2] = extraout_XMM0_Dc_x01303;
  puVar1[3] = extraout_XMM0_Dd_x01303;
  puVar4[0x9b5] = puVar4[0x1dfb];
  puVar4[0x9b6] = puVar4[0x1dfc];
  puVar4[0x9b7] = puVar4[0x1df9];
  puVar4[0x9b8] = puVar4[0x1dfa];
  puVar4[0x9b9] = puVar4[0x1df7];
  puVar4[0x9ba] = puVar4[0x1df8];
  puVar4[0x9bb] = puVar4[0x1df3];
  puVar4[0x9bc] = puVar4[0x1df4];
  puVar4[0x9bd] = puVar4[0x1df1];
  puVar4[0x9be] = puVar4[0x1df2];
  puVar4[0x9bf] = puVar4[0x1def];
  puVar4[0x9c0] = puVar4[0x1df0];
  puVar4[-0x346] = 0x904af7;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x9b3) = extraout_XMM0_Da_x01304;
  *(undefined4 *)((long)puVar4 + 0x4d9c) = extraout_XMM0_Db_x01304;
  *(undefined4 *)(puVar4 + 0x9b4) = extraout_XMM0_Dc_x01304;
  *(undefined4 *)((long)puVar4 + 0x4da4) = extraout_XMM0_Dd_x01304;
  puVar4[-0x346] = 0x904b0b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x9b1) = extraout_XMM0_Da_x01305;
  *(undefined4 *)((long)puVar4 + 0x4d8c) = extraout_XMM0_Db_x01305;
  *(undefined4 *)(puVar4 + 0x9b2) = extraout_XMM0_Dc_x01305;
  *(undefined4 *)((long)puVar4 + 0x4d94) = extraout_XMM0_Dd_x01305;
  puVar4[-0x346] = 0x904b20;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x9ad) = extraout_XMM0_Da_x01306;
  *(undefined4 *)((long)puVar4 + 0x4d6c) = extraout_XMM0_Db_x01306;
  *(undefined4 *)(puVar4 + 0x9ae) = extraout_XMM0_Dc_x01306;
  *(undefined4 *)((long)puVar4 + 0x4d74) = extraout_XMM0_Dd_x01306;
  puVar4[0x9af] = puVar4[0x1ddd];
  puVar4[0x9b0] = puVar4[0x1dde];
  puVar4[-0x346] = 0x904b45;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x904b65;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1dcf) = extraout_XMM0_Da_x01307;
  *(undefined4 *)((long)puVar4 + 0xee7c) = extraout_XMM0_Db_x01307;
  *(undefined4 *)(puVar4 + 0x1dd0) = extraout_XMM0_Dc_x01307;
  *(undefined4 *)((long)puVar4 + 0xee84) = extraout_XMM0_Dd_x01307;
  puVar4[-0x346] = 0x904b7d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x1023] = puVar4[0x9b5];
  puVar4[0x1024] = puVar4[0x9b6];
  puVar4[0x1021] = puVar4[0x9b7];
  puVar4[0x1022] = puVar4[0x9b8];
  puVar4[0x101f] = puVar4[0x9b9];
  puVar4[0x1020] = puVar4[0x9ba];
  puVar4[0x101e] = puVar4[0xd0c];
  puVar4[0x101b] = puVar4[0x9bb];
  puVar4[0x101c] = puVar4[0x9bc];
  puVar4[0x1019] = puVar4[0x9bd];
  puVar4[0x101a] = puVar4[0x9be];
  puVar4[0x1017] = puVar4[0x9bf];
  puVar4[0x1018] = puVar4[0x9c0];
  puVar4[0x1016] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0x1013) = extraout_XMM0_Da_x01308;
  *(undefined4 *)((long)puVar4 + 0x809c) = extraout_XMM0_Db_x01308;
  *(undefined4 *)(puVar4 + 0x1014) = extraout_XMM0_Dc_x01308;
  *(undefined4 *)((long)puVar4 + 0x80a4) = extraout_XMM0_Dd_x01308;
  uVar2 = ((undefined8 *)puVar4[0x1016])[1];
  puVar4[0x9c3] = *(undefined8 *)puVar4[0x1016];
  puVar4[0x9c4] = uVar2;
  puVar4[-0x346] = 0x904c25;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x9c1) = extraout_XMM0_Da_x01309;
  *(undefined4 *)((long)puVar4 + 0x4e0c) = extraout_XMM0_Db_x01309;
  *(undefined4 *)(puVar4 + 0x9c2) = extraout_XMM0_Dc_x01309;
  *(undefined4 *)((long)puVar4 + 0x4e14) = extraout_XMM0_Dd_x01309;
  puVar4[-0x346] = 0x904c4a;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x904c6a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0x1011) = extraout_XMM0_Da_x01310;
  *(undefined4 *)((long)puVar4 + 0x808c) = extraout_XMM0_Db_x01310;
  *(undefined4 *)(puVar4 + 0x1012) = extraout_XMM0_Dc_x01310;
  *(undefined4 *)((long)puVar4 + 0x8094) = extraout_XMM0_Dd_x01310;
  puVar4[-0x346] = 0x904c7f;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x9c5) = extraout_XMM0_Da_x01311;
  *(undefined4 *)((long)puVar4 + 0x4e2c) = extraout_XMM0_Db_x01311;
  *(undefined4 *)(puVar4 + 0x9c6) = extraout_XMM0_Dc_x01311;
  *(undefined4 *)((long)puVar4 + 0x4e34) = extraout_XMM0_Dd_x01311;
  puVar4[-0x346] = 0x904ca4;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x904cb4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0x100f) = extraout_XMM0_Da_x01312;
  *(undefined4 *)((long)puVar4 + 0x807c) = extraout_XMM0_Db_x01312;
  *(undefined4 *)(puVar4 + 0x1010) = extraout_XMM0_Dc_x01312;
  *(undefined4 *)((long)puVar4 + 0x8084) = extraout_XMM0_Dd_x01312;
  puVar4[-0x346] = 0x904cd4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x101e];
  *puVar1 = extraout_XMM0_Da_x01313;
  puVar1[1] = extraout_XMM0_Db_x01313;
  puVar1[2] = extraout_XMM0_Dc_x01313;
  puVar1[3] = extraout_XMM0_Dd_x01313;
  puVar4[-0x346] = 0x904cf4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1016];
  *puVar1 = extraout_XMM0_Da_x01314;
  puVar1[1] = extraout_XMM0_Db_x01314;
  puVar1[2] = extraout_XMM0_Dc_x01314;
  puVar1[3] = extraout_XMM0_Dd_x01314;
  puVar4[0x9cf] = puVar4[0x1dfd];
  puVar4[0x9d0] = puVar4[0x1dfe];
  puVar4[0x9d1] = puVar4[0x1dfb];
  puVar4[0x9d2] = puVar4[0x1dfc];
  puVar4[0x9d3] = puVar4[0x1df9];
  puVar4[0x9d4] = puVar4[0x1dfa];
  puVar4[0x9d5] = puVar4[0x1df5];
  puVar4[0x9d6] = puVar4[0x1df6];
  puVar4[0x9d7] = puVar4[0x1df3];
  puVar4[0x9d8] = puVar4[0x1df4];
  puVar4[0x9d9] = puVar4[0x1df1];
  puVar4[0x9da] = puVar4[0x1df2];
  puVar4[-0x346] = 0x904d6b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x9cd) = extraout_XMM0_Da_x01315;
  *(undefined4 *)((long)puVar4 + 0x4e6c) = extraout_XMM0_Db_x01315;
  *(undefined4 *)(puVar4 + 0x9ce) = extraout_XMM0_Dc_x01315;
  *(undefined4 *)((long)puVar4 + 0x4e74) = extraout_XMM0_Dd_x01315;
  puVar4[-0x346] = 0x904d80;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x9cb) = extraout_XMM0_Da_x01316;
  *(undefined4 *)((long)puVar4 + 0x4e5c) = extraout_XMM0_Db_x01316;
  *(undefined4 *)(puVar4 + 0x9cc) = extraout_XMM0_Dc_x01316;
  *(undefined4 *)((long)puVar4 + 0x4e64) = extraout_XMM0_Dd_x01316;
  puVar4[0x9c9] = puVar4[0x1ddb];
  puVar4[0x9ca] = puVar4[0x1ddc];
  puVar4[-0x346] = 0x904da5;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x904dc5;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x904dd5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0x100d] = puVar4[0x9cf];
  puVar4[0x100e] = puVar4[0x9d0];
  puVar4[0x100b] = puVar4[0x9d1];
  puVar4[0x100c] = puVar4[0x9d2];
  puVar4[0x1009] = puVar4[0x9d3];
  puVar4[0x100a] = puVar4[0x9d4];
  puVar4[0x1008] = puVar4[0xcb6];
  puVar4[0x1005] = puVar4[0x9d5];
  puVar4[0x1006] = puVar4[0x9d6];
  puVar4[0x1003] = puVar4[0x9d7];
  puVar4[0x1004] = puVar4[0x9d8];
  puVar4[0x1001] = puVar4[0x9d9];
  puVar4[0x1002] = puVar4[0x9da];
  puVar4[0x1000] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0xffd) = extraout_XMM0_Da_x01317;
  *(undefined4 *)((long)puVar4 + 0x7fec) = extraout_XMM0_Db_x01317;
  *(undefined4 *)(puVar4 + 0xffe) = extraout_XMM0_Dc_x01317;
  *(undefined4 *)((long)puVar4 + 0x7ff4) = extraout_XMM0_Dd_x01317;
  uVar2 = ((undefined8 *)puVar4[0x1000])[1];
  puVar4[0x9dd] = *(undefined8 *)puVar4[0x1000];
  puVar4[0x9de] = uVar2;
  puVar4[-0x346] = 0x904e7d;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x9db) = extraout_XMM0_Da_x01318;
  *(undefined4 *)((long)puVar4 + 0x4edc) = extraout_XMM0_Db_x01318;
  *(undefined4 *)(puVar4 + 0x9dc) = extraout_XMM0_Dc_x01318;
  *(undefined4 *)((long)puVar4 + 0x4ee4) = extraout_XMM0_Dd_x01318;
  puVar4[-0x346] = 0x904ea2;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x904ec2;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xffb) = extraout_XMM0_Da_x01319;
  *(undefined4 *)((long)puVar4 + 0x7fdc) = extraout_XMM0_Db_x01319;
  *(undefined4 *)(puVar4 + 0xffc) = extraout_XMM0_Dc_x01319;
  *(undefined4 *)((long)puVar4 + 0x7fe4) = extraout_XMM0_Dd_x01319;
  puVar4[-0x346] = 0x904ed7;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x9df) = extraout_XMM0_Da_x01320;
  *(undefined4 *)((long)puVar4 + 0x4efc) = extraout_XMM0_Db_x01320;
  *(undefined4 *)(puVar4 + 0x9e0) = extraout_XMM0_Dc_x01320;
  *(undefined4 *)((long)puVar4 + 0x4f04) = extraout_XMM0_Dd_x01320;
  puVar4[-0x346] = 0x904efc;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x904f0c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xff9) = extraout_XMM0_Da_x01321;
  *(undefined4 *)((long)puVar4 + 0x7fcc) = extraout_XMM0_Db_x01321;
  *(undefined4 *)(puVar4 + 0xffa) = extraout_XMM0_Dc_x01321;
  *(undefined4 *)((long)puVar4 + 0x7fd4) = extraout_XMM0_Dd_x01321;
  puVar4[-0x346] = 0x904f2c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1008];
  *puVar1 = extraout_XMM0_Da_x01322;
  puVar1[1] = extraout_XMM0_Db_x01322;
  puVar1[2] = extraout_XMM0_Dc_x01322;
  puVar1[3] = extraout_XMM0_Dd_x01322;
  puVar4[-0x346] = 0x904f4c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0x1000];
  *puVar1 = extraout_XMM0_Da_x01323;
  puVar1[1] = extraout_XMM0_Db_x01323;
  puVar1[2] = extraout_XMM0_Dc_x01323;
  puVar1[3] = extraout_XMM0_Dd_x01323;
  puVar4[0x9e9] = puVar4[0x1def];
  puVar4[0x9ea] = puVar4[0x1df0];
  puVar4[0x9eb] = puVar4[0x1dfd];
  puVar4[0x9ec] = puVar4[0x1dfe];
  puVar4[0x9ed] = puVar4[0x1dfb];
  puVar4[0x9ee] = puVar4[0x1dfc];
  puVar4[0x9ef] = puVar4[0x1df7];
  puVar4[0x9f0] = puVar4[0x1df8];
  puVar4[0x9f1] = puVar4[0x1df5];
  puVar4[0x9f2] = puVar4[0x1df6];
  puVar4[0x9f3] = puVar4[0x1df3];
  puVar4[0x9f4] = puVar4[0x1df4];
  puVar4[-0x346] = 0x904fc3;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0x9e7) = extraout_XMM0_Da_x01324;
  *(undefined4 *)((long)puVar4 + 0x4f3c) = extraout_XMM0_Db_x01324;
  *(undefined4 *)(puVar4 + 0x9e8) = extraout_XMM0_Dc_x01324;
  *(undefined4 *)((long)puVar4 + 0x4f44) = extraout_XMM0_Dd_x01324;
  puVar4[-0x346] = 0x904fd8;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x9e5) = extraout_XMM0_Da_x01325;
  *(undefined4 *)((long)puVar4 + 0x4f2c) = extraout_XMM0_Db_x01325;
  *(undefined4 *)(puVar4 + 0x9e6) = extraout_XMM0_Dc_x01325;
  *(undefined4 *)((long)puVar4 + 0x4f34) = extraout_XMM0_Dd_x01325;
  puVar4[0x9e3] = puVar4[0x1dd9];
  puVar4[0x9e4] = puVar4[0x1dda];
  puVar4[-0x346] = 0x904ffd;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x90501d;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x90502d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xff7] = puVar4[0x9e9];
  puVar4[0xff8] = puVar4[0x9ea];
  puVar4[0xff5] = puVar4[0x9eb];
  puVar4[0xff6] = puVar4[0x9ec];
  puVar4[0xff3] = puVar4[0x9ed];
  puVar4[0xff4] = puVar4[0x9ee];
  puVar4[0xff2] = puVar4[0xcd4];
  puVar4[0xfef] = puVar4[0x9ef];
  puVar4[0xff0] = puVar4[0x9f0];
  puVar4[0xfed] = puVar4[0x9f1];
  puVar4[0xfee] = puVar4[0x9f2];
  puVar4[0xfeb] = puVar4[0x9f3];
  puVar4[0xfec] = puVar4[0x9f4];
  puVar4[0xfea] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0xfe7) = extraout_XMM0_Da_x01326;
  *(undefined4 *)((long)puVar4 + 0x7f3c) = extraout_XMM0_Db_x01326;
  *(undefined4 *)(puVar4 + 0xfe8) = extraout_XMM0_Dc_x01326;
  *(undefined4 *)((long)puVar4 + 0x7f44) = extraout_XMM0_Dd_x01326;
  uVar2 = ((undefined8 *)puVar4[0xfea])[1];
  puVar4[0x9f7] = *(undefined8 *)puVar4[0xfea];
  puVar4[0x9f8] = uVar2;
  puVar4[-0x346] = 0x9050d5;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x9f5) = extraout_XMM0_Da_x01327;
  *(undefined4 *)((long)puVar4 + 0x4fac) = extraout_XMM0_Db_x01327;
  *(undefined4 *)(puVar4 + 0x9f6) = extraout_XMM0_Dc_x01327;
  *(undefined4 *)((long)puVar4 + 0x4fb4) = extraout_XMM0_Dd_x01327;
  puVar4[-0x346] = 0x9050fa;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90511a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xfe5) = extraout_XMM0_Da_x01328;
  *(undefined4 *)((long)puVar4 + 0x7f2c) = extraout_XMM0_Db_x01328;
  *(undefined4 *)(puVar4 + 0xfe6) = extraout_XMM0_Dc_x01328;
  *(undefined4 *)((long)puVar4 + 0x7f34) = extraout_XMM0_Dd_x01328;
  puVar4[-0x346] = 0x90512f;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0x9f9) = extraout_XMM0_Da_x01329;
  *(undefined4 *)((long)puVar4 + 0x4fcc) = extraout_XMM0_Db_x01329;
  *(undefined4 *)(puVar4 + 0x9fa) = extraout_XMM0_Dc_x01329;
  *(undefined4 *)((long)puVar4 + 0x4fd4) = extraout_XMM0_Dd_x01329;
  puVar4[-0x346] = 0x905154;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x905164;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xfe3) = extraout_XMM0_Da_x01330;
  *(undefined4 *)((long)puVar4 + 0x7f1c) = extraout_XMM0_Db_x01330;
  *(undefined4 *)(puVar4 + 0xfe4) = extraout_XMM0_Dc_x01330;
  *(undefined4 *)((long)puVar4 + 0x7f24) = extraout_XMM0_Dd_x01330;
  puVar4[-0x346] = 0x905184;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xff2];
  *puVar1 = extraout_XMM0_Da_x01331;
  puVar1[1] = extraout_XMM0_Db_x01331;
  puVar1[2] = extraout_XMM0_Dc_x01331;
  puVar1[3] = extraout_XMM0_Dd_x01331;
  puVar4[-0x346] = 0x9051a4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xfea];
  *puVar1 = extraout_XMM0_Da_x01332;
  puVar1[1] = extraout_XMM0_Db_x01332;
  puVar1[2] = extraout_XMM0_Dc_x01332;
  puVar1[3] = extraout_XMM0_Dd_x01332;
  puVar4[0xa03] = puVar4[0x1df1];
  puVar4[0xa04] = puVar4[0x1df2];
  puVar4[0xa05] = puVar4[0x1def];
  puVar4[0xa06] = puVar4[0x1df0];
  puVar4[0xa07] = puVar4[0x1dfd];
  puVar4[0xa08] = puVar4[0x1dfe];
  puVar4[0xa09] = puVar4[0x1df9];
  puVar4[0xa0a] = puVar4[0x1dfa];
  puVar4[0xa0b] = puVar4[0x1df7];
  puVar4[0xa0c] = puVar4[0x1df8];
  puVar4[0xa0d] = puVar4[0x1df5];
  puVar4[0xa0e] = puVar4[0x1df6];
  puVar4[-0x346] = 0x90521b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xa01) = extraout_XMM0_Da_x01333;
  *(undefined4 *)((long)puVar4 + 0x500c) = extraout_XMM0_Db_x01333;
  *(undefined4 *)(puVar4 + 0xa02) = extraout_XMM0_Dc_x01333;
  *(undefined4 *)((long)puVar4 + 0x5014) = extraout_XMM0_Dd_x01333;
  puVar4[-0x346] = 0x905230;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0x9ff) = extraout_XMM0_Da_x01334;
  *(undefined4 *)((long)puVar4 + 0x4ffc) = extraout_XMM0_Db_x01334;
  *(undefined4 *)(puVar4 + 0xa00) = extraout_XMM0_Dc_x01334;
  *(undefined4 *)((long)puVar4 + 0x5004) = extraout_XMM0_Dd_x01334;
  puVar4[0x9fd] = puVar4[0x1dd7];
  puVar4[0x9fe] = puVar4[0x1dd8];
  puVar4[-0x346] = 0x905255;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x905275;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x905285;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xfe1] = puVar4[0xa03];
  puVar4[0xfe2] = puVar4[0xa04];
  puVar4[0xfdf] = puVar4[0xa05];
  puVar4[0xfe0] = puVar4[0xa06];
  puVar4[0xfdd] = puVar4[0xa07];
  puVar4[0xfde] = puVar4[0xa08];
  puVar4[0xfdc] = puVar4[0xcf4];
  puVar4[0xfd9] = puVar4[0xa09];
  puVar4[0xfda] = puVar4[0xa0a];
  puVar4[0xfd7] = puVar4[0xa0b];
  puVar4[0xfd8] = puVar4[0xa0c];
  puVar4[0xfd5] = puVar4[0xa0d];
  puVar4[0xfd6] = puVar4[0xa0e];
  puVar4[0xfd4] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0xfd1) = extraout_XMM0_Da_x01335;
  *(undefined4 *)((long)puVar4 + 0x7e8c) = extraout_XMM0_Db_x01335;
  *(undefined4 *)(puVar4 + 0xfd2) = extraout_XMM0_Dc_x01335;
  *(undefined4 *)((long)puVar4 + 0x7e94) = extraout_XMM0_Dd_x01335;
  uVar2 = ((undefined8 *)puVar4[0xfd4])[1];
  puVar4[0xa11] = *(undefined8 *)puVar4[0xfd4];
  puVar4[0xa12] = uVar2;
  puVar4[-0x346] = 0x90532d;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xa0f) = extraout_XMM0_Da_x01336;
  *(undefined4 *)((long)puVar4 + 0x507c) = extraout_XMM0_Db_x01336;
  *(undefined4 *)(puVar4 + 0xa10) = extraout_XMM0_Dc_x01336;
  *(undefined4 *)((long)puVar4 + 0x5084) = extraout_XMM0_Dd_x01336;
  puVar4[-0x346] = 0x905352;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x905372;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xfcf) = extraout_XMM0_Da_x01337;
  *(undefined4 *)((long)puVar4 + 0x7e7c) = extraout_XMM0_Db_x01337;
  *(undefined4 *)(puVar4 + 0xfd0) = extraout_XMM0_Dc_x01337;
  *(undefined4 *)((long)puVar4 + 0x7e84) = extraout_XMM0_Dd_x01337;
  puVar4[-0x346] = 0x905387;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xa13) = extraout_XMM0_Da_x01338;
  *(undefined4 *)((long)puVar4 + 0x509c) = extraout_XMM0_Db_x01338;
  *(undefined4 *)(puVar4 + 0xa14) = extraout_XMM0_Dc_x01338;
  *(undefined4 *)((long)puVar4 + 0x50a4) = extraout_XMM0_Dd_x01338;
  puVar4[-0x346] = 0x9053ac;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9053bc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xfcd) = extraout_XMM0_Da_x01339;
  *(undefined4 *)((long)puVar4 + 0x7e6c) = extraout_XMM0_Db_x01339;
  *(undefined4 *)(puVar4 + 0xfce) = extraout_XMM0_Dc_x01339;
  *(undefined4 *)((long)puVar4 + 0x7e74) = extraout_XMM0_Dd_x01339;
  puVar4[-0x346] = 0x9053dc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xfdc];
  *puVar1 = extraout_XMM0_Da_x01340;
  puVar1[1] = extraout_XMM0_Db_x01340;
  puVar1[2] = extraout_XMM0_Dc_x01340;
  puVar1[3] = extraout_XMM0_Dd_x01340;
  puVar4[-0x346] = 0x9053fc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xfd4];
  *puVar1 = extraout_XMM0_Da_x01341;
  puVar1[1] = extraout_XMM0_Db_x01341;
  puVar1[2] = extraout_XMM0_Dc_x01341;
  puVar1[3] = extraout_XMM0_Dd_x01341;
  puVar4[0xa1d] = puVar4[0x1df3];
  puVar4[0xa1e] = puVar4[0x1df4];
  puVar4[0xa1f] = puVar4[0x1df1];
  puVar4[0xa20] = puVar4[0x1df2];
  puVar4[0xa21] = puVar4[0x1def];
  puVar4[0xa22] = puVar4[0x1df0];
  puVar4[0xa23] = puVar4[0x1dfb];
  puVar4[0xa24] = puVar4[0x1dfc];
  puVar4[0xa25] = puVar4[0x1df9];
  puVar4[0xa26] = puVar4[0x1dfa];
  puVar4[0xa27] = puVar4[0x1df7];
  puVar4[0xa28] = puVar4[0x1df8];
  puVar4[-0x346] = 0x905473;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xa1b) = extraout_XMM0_Da_x01342;
  *(undefined4 *)((long)puVar4 + 0x50dc) = extraout_XMM0_Db_x01342;
  *(undefined4 *)(puVar4 + 0xa1c) = extraout_XMM0_Dc_x01342;
  *(undefined4 *)((long)puVar4 + 0x50e4) = extraout_XMM0_Dd_x01342;
  puVar4[-0x346] = 0x905488;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xa19) = extraout_XMM0_Da_x01343;
  *(undefined4 *)((long)puVar4 + 0x50cc) = extraout_XMM0_Db_x01343;
  *(undefined4 *)(puVar4 + 0xa1a) = extraout_XMM0_Dc_x01343;
  *(undefined4 *)((long)puVar4 + 0x50d4) = extraout_XMM0_Dd_x01343;
  puVar4[0xa17] = puVar4[0x1dd5];
  puVar4[0xa18] = puVar4[0x1dd6];
  puVar4[-0x346] = 0x9054ad;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x9054cd;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x9054dd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xfcb] = puVar4[0xa1d];
  puVar4[0xfcc] = puVar4[0xa1e];
  puVar4[0xfc9] = puVar4[0xa1f];
  puVar4[0xfca] = puVar4[0xa20];
  puVar4[0xfc7] = puVar4[0xa21];
  puVar4[0xfc8] = puVar4[0xa22];
  puVar4[0xfc6] = puVar4[0xd14];
  puVar4[0xfc3] = puVar4[0xa23];
  puVar4[0xfc4] = puVar4[0xa24];
  puVar4[0xfc1] = puVar4[0xa25];
  puVar4[0xfc2] = puVar4[0xa26];
  puVar4[0xfbf] = puVar4[0xa27];
  puVar4[0xfc0] = puVar4[0xa28];
  puVar4[0xfbe] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0xfbb) = extraout_XMM0_Da_x01344;
  *(undefined4 *)((long)puVar4 + 0x7ddc) = extraout_XMM0_Db_x01344;
  *(undefined4 *)(puVar4 + 0xfbc) = extraout_XMM0_Dc_x01344;
  *(undefined4 *)((long)puVar4 + 0x7de4) = extraout_XMM0_Dd_x01344;
  uVar2 = ((undefined8 *)puVar4[0xfbe])[1];
  puVar4[0xa2b] = *(undefined8 *)puVar4[0xfbe];
  puVar4[0xa2c] = uVar2;
  puVar4[-0x346] = 0x905585;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xa29) = extraout_XMM0_Da_x01345;
  *(undefined4 *)((long)puVar4 + 0x514c) = extraout_XMM0_Db_x01345;
  *(undefined4 *)(puVar4 + 0xa2a) = extraout_XMM0_Dc_x01345;
  *(undefined4 *)((long)puVar4 + 0x5154) = extraout_XMM0_Dd_x01345;
  puVar4[-0x346] = 0x9055aa;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9055ca;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xfb9) = extraout_XMM0_Da_x01346;
  *(undefined4 *)((long)puVar4 + 0x7dcc) = extraout_XMM0_Db_x01346;
  *(undefined4 *)(puVar4 + 0xfba) = extraout_XMM0_Dc_x01346;
  *(undefined4 *)((long)puVar4 + 0x7dd4) = extraout_XMM0_Dd_x01346;
  puVar4[-0x346] = 0x9055df;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xa2d) = extraout_XMM0_Da_x01347;
  *(undefined4 *)((long)puVar4 + 0x516c) = extraout_XMM0_Db_x01347;
  *(undefined4 *)(puVar4 + 0xa2e) = extraout_XMM0_Dc_x01347;
  *(undefined4 *)((long)puVar4 + 0x5174) = extraout_XMM0_Dd_x01347;
  puVar4[-0x346] = 0x905604;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x905614;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xfb7) = extraout_XMM0_Da_x01348;
  *(undefined4 *)((long)puVar4 + 0x7dbc) = extraout_XMM0_Db_x01348;
  *(undefined4 *)(puVar4 + 0xfb8) = extraout_XMM0_Dc_x01348;
  *(undefined4 *)((long)puVar4 + 0x7dc4) = extraout_XMM0_Dd_x01348;
  puVar4[-0x346] = 0x905634;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xfc6];
  *puVar1 = extraout_XMM0_Da_x01349;
  puVar1[1] = extraout_XMM0_Db_x01349;
  puVar1[2] = extraout_XMM0_Dc_x01349;
  puVar1[3] = extraout_XMM0_Dd_x01349;
  puVar4[-0x346] = 0x905654;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xfbe];
  *puVar1 = extraout_XMM0_Da_x01350;
  puVar1[1] = extraout_XMM0_Db_x01350;
  puVar1[2] = extraout_XMM0_Dc_x01350;
  puVar1[3] = extraout_XMM0_Dd_x01350;
  puVar4[0xa37] = puVar4[0x1df5];
  puVar4[0xa38] = puVar4[0x1df6];
  puVar4[0xa39] = puVar4[0x1df3];
  puVar4[0xa3a] = puVar4[0x1df4];
  puVar4[0xa3b] = puVar4[0x1df1];
  puVar4[0xa3c] = puVar4[0x1df2];
  puVar4[0xa3d] = puVar4[0x1dfd];
  puVar4[0xa3e] = puVar4[0x1dfe];
  puVar4[0xa3f] = puVar4[0x1dfb];
  puVar4[0xa40] = puVar4[0x1dfc];
  puVar4[0xa41] = puVar4[0x1df9];
  puVar4[0xa42] = puVar4[0x1dfa];
  puVar4[-0x346] = 0x9056cb;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xa35) = extraout_XMM0_Da_x01351;
  *(undefined4 *)((long)puVar4 + 0x51ac) = extraout_XMM0_Db_x01351;
  *(undefined4 *)(puVar4 + 0xa36) = extraout_XMM0_Dc_x01351;
  *(undefined4 *)((long)puVar4 + 0x51b4) = extraout_XMM0_Dd_x01351;
  puVar4[-0x346] = 0x9056e0;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xa33) = extraout_XMM0_Da_x01352;
  *(undefined4 *)((long)puVar4 + 0x519c) = extraout_XMM0_Db_x01352;
  *(undefined4 *)(puVar4 + 0xa34) = extraout_XMM0_Dc_x01352;
  *(undefined4 *)((long)puVar4 + 0x51a4) = extraout_XMM0_Dd_x01352;
  puVar4[0xa31] = puVar4[0x1dd3];
  puVar4[0xa32] = puVar4[0x1dd4];
  puVar4[-0x346] = 0x905705;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x905725;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x905735;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xfb5] = puVar4[0xa37];
  puVar4[0xfb6] = puVar4[0xa38];
  puVar4[0xfb3] = puVar4[0xa39];
  puVar4[0xfb4] = puVar4[0xa3a];
  puVar4[0xfb1] = puVar4[0xa3b];
  puVar4[0xfb2] = puVar4[0xa3c];
  puVar4[0xfb0] = puVar4[0xcae];
  puVar4[0xfad] = puVar4[0xa3d];
  puVar4[0xfae] = puVar4[0xa3e];
  puVar4[0xfab] = puVar4[0xa3f];
  puVar4[0xfac] = puVar4[0xa40];
  puVar4[0xfa9] = puVar4[0xa41];
  puVar4[0xfaa] = puVar4[0xa42];
  puVar4[0xfa8] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0xfa5) = extraout_XMM0_Da_x01353;
  *(undefined4 *)((long)puVar4 + 0x7d2c) = extraout_XMM0_Db_x01353;
  *(undefined4 *)(puVar4 + 0xfa6) = extraout_XMM0_Dc_x01353;
  *(undefined4 *)((long)puVar4 + 0x7d34) = extraout_XMM0_Dd_x01353;
  uVar2 = ((undefined8 *)puVar4[0xfa8])[1];
  puVar4[0xa45] = *(undefined8 *)puVar4[0xfa8];
  puVar4[0xa46] = uVar2;
  puVar4[-0x346] = 0x9057dd;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xa43) = extraout_XMM0_Da_x01354;
  *(undefined4 *)((long)puVar4 + 0x521c) = extraout_XMM0_Db_x01354;
  *(undefined4 *)(puVar4 + 0xa44) = extraout_XMM0_Dc_x01354;
  *(undefined4 *)((long)puVar4 + 0x5224) = extraout_XMM0_Dd_x01354;
  puVar4[-0x346] = 0x905802;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x905822;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xfa3) = extraout_XMM0_Da_x01355;
  *(undefined4 *)((long)puVar4 + 0x7d1c) = extraout_XMM0_Db_x01355;
  *(undefined4 *)(puVar4 + 0xfa4) = extraout_XMM0_Dc_x01355;
  *(undefined4 *)((long)puVar4 + 0x7d24) = extraout_XMM0_Dd_x01355;
  puVar4[-0x346] = 0x905837;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xa47) = extraout_XMM0_Da_x01356;
  *(undefined4 *)((long)puVar4 + 0x523c) = extraout_XMM0_Db_x01356;
  *(undefined4 *)(puVar4 + 0xa48) = extraout_XMM0_Dc_x01356;
  *(undefined4 *)((long)puVar4 + 0x5244) = extraout_XMM0_Dd_x01356;
  puVar4[-0x346] = 0x90585c;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90586c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xfa1) = extraout_XMM0_Da_x01357;
  *(undefined4 *)((long)puVar4 + 0x7d0c) = extraout_XMM0_Db_x01357;
  *(undefined4 *)(puVar4 + 0xfa2) = extraout_XMM0_Dc_x01357;
  *(undefined4 *)((long)puVar4 + 0x7d14) = extraout_XMM0_Dd_x01357;
  puVar4[-0x346] = 0x90588c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xfb0];
  *puVar1 = extraout_XMM0_Da_x01358;
  puVar1[1] = extraout_XMM0_Db_x01358;
  puVar1[2] = extraout_XMM0_Dc_x01358;
  puVar1[3] = extraout_XMM0_Dd_x01358;
  puVar4[-0x346] = 0x9058ac;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xfa8];
  *puVar1 = extraout_XMM0_Da_x01359;
  puVar1[1] = extraout_XMM0_Db_x01359;
  puVar1[2] = extraout_XMM0_Dc_x01359;
  puVar1[3] = extraout_XMM0_Dd_x01359;
  puVar4[0xa51] = puVar4[0x1df7];
  puVar4[0xa52] = puVar4[0x1df8];
  puVar4[0xa53] = puVar4[0x1df5];
  puVar4[0xa54] = puVar4[0x1df6];
  puVar4[0xa55] = puVar4[0x1df3];
  puVar4[0xa56] = puVar4[0x1df4];
  puVar4[0xa57] = puVar4[0x1def];
  puVar4[0xa58] = puVar4[0x1df0];
  puVar4[0xa59] = puVar4[0x1dfd];
  puVar4[0xa5a] = puVar4[0x1dfe];
  puVar4[0xa5b] = puVar4[0x1dfb];
  puVar4[0xa5c] = puVar4[0x1dfc];
  puVar4[-0x346] = 0x905923;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xa4f) = extraout_XMM0_Da_x01360;
  *(undefined4 *)((long)puVar4 + 0x527c) = extraout_XMM0_Db_x01360;
  *(undefined4 *)(puVar4 + 0xa50) = extraout_XMM0_Dc_x01360;
  *(undefined4 *)((long)puVar4 + 0x5284) = extraout_XMM0_Dd_x01360;
  puVar4[-0x346] = 0x905938;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xa4d) = extraout_XMM0_Da_x01361;
  *(undefined4 *)((long)puVar4 + 0x526c) = extraout_XMM0_Db_x01361;
  *(undefined4 *)(puVar4 + 0xa4e) = extraout_XMM0_Dc_x01361;
  *(undefined4 *)((long)puVar4 + 0x5274) = extraout_XMM0_Dd_x01361;
  puVar4[0xa4b] = puVar4[0x1dd1];
  puVar4[0xa4c] = puVar4[0x1dd2];
  puVar4[-0x346] = 0x90595d;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x90597d;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x90598d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[3999] = puVar4[0xa51];
  puVar4[4000] = puVar4[0xa52];
  puVar4[0xf9d] = puVar4[0xa53];
  puVar4[0xf9e] = puVar4[0xa54];
  puVar4[0xf9b] = puVar4[0xa55];
  puVar4[0xf9c] = puVar4[0xa56];
  puVar4[0xf9a] = puVar4[0xccc];
  puVar4[0xf97] = puVar4[0xa57];
  puVar4[0xf98] = puVar4[0xa58];
  puVar4[0xf95] = puVar4[0xa59];
  puVar4[0xf96] = puVar4[0xa5a];
  puVar4[0xf93] = puVar4[0xa5b];
  puVar4[0xf94] = puVar4[0xa5c];
  puVar4[0xf92] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0xf8f) = extraout_XMM0_Da_x01362;
  *(undefined4 *)((long)puVar4 + 0x7c7c) = extraout_XMM0_Db_x01362;
  *(undefined4 *)(puVar4 + 0xf90) = extraout_XMM0_Dc_x01362;
  *(undefined4 *)((long)puVar4 + 0x7c84) = extraout_XMM0_Dd_x01362;
  uVar2 = ((undefined8 *)puVar4[0xf92])[1];
  puVar4[0xa5f] = *(undefined8 *)puVar4[0xf92];
  puVar4[0xa60] = uVar2;
  puVar4[-0x346] = 0x905a35;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xa5d) = extraout_XMM0_Da_x01363;
  *(undefined4 *)((long)puVar4 + 0x52ec) = extraout_XMM0_Db_x01363;
  *(undefined4 *)(puVar4 + 0xa5e) = extraout_XMM0_Dc_x01363;
  *(undefined4 *)((long)puVar4 + 0x52f4) = extraout_XMM0_Dd_x01363;
  puVar4[-0x346] = 0x905a5a;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x905a7a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xf8d) = extraout_XMM0_Da_x01364;
  *(undefined4 *)((long)puVar4 + 0x7c6c) = extraout_XMM0_Db_x01364;
  *(undefined4 *)(puVar4 + 0xf8e) = extraout_XMM0_Dc_x01364;
  *(undefined4 *)((long)puVar4 + 0x7c74) = extraout_XMM0_Dd_x01364;
  puVar4[-0x346] = 0x905a8f;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xa61) = extraout_XMM0_Da_x01365;
  *(undefined4 *)((long)puVar4 + 0x530c) = extraout_XMM0_Db_x01365;
  *(undefined4 *)(puVar4 + 0xa62) = extraout_XMM0_Dc_x01365;
  *(undefined4 *)((long)puVar4 + 0x5314) = extraout_XMM0_Dd_x01365;
  puVar4[-0x346] = 0x905ab4;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x905ac4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xf8b) = extraout_XMM0_Da_x01366;
  *(undefined4 *)((long)puVar4 + 0x7c5c) = extraout_XMM0_Db_x01366;
  *(undefined4 *)(puVar4 + 0xf8c) = extraout_XMM0_Dc_x01366;
  *(undefined4 *)((long)puVar4 + 0x7c64) = extraout_XMM0_Dd_x01366;
  puVar4[-0x346] = 0x905ae4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xf9a];
  *puVar1 = extraout_XMM0_Da_x01367;
  puVar1[1] = extraout_XMM0_Db_x01367;
  puVar1[2] = extraout_XMM0_Dc_x01367;
  puVar1[3] = extraout_XMM0_Dd_x01367;
  puVar4[-0x346] = 0x905b04;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xf92];
  *puVar1 = extraout_XMM0_Da_x01368;
  puVar1[1] = extraout_XMM0_Db_x01368;
  puVar1[2] = extraout_XMM0_Dc_x01368;
  puVar1[3] = extraout_XMM0_Dd_x01368;
  puVar4[0xa6b] = puVar4[0x1df9];
  puVar4[0xa6c] = puVar4[0x1dfa];
  puVar4[0xa6d] = puVar4[0x1df7];
  puVar4[0xa6e] = puVar4[0x1df8];
  puVar4[0xa6f] = puVar4[0x1df5];
  puVar4[0xa70] = puVar4[0x1df6];
  puVar4[0xa71] = puVar4[0x1df1];
  puVar4[0xa72] = puVar4[0x1df2];
  puVar4[0xa73] = puVar4[0x1def];
  puVar4[0xa74] = puVar4[0x1df0];
  puVar4[0xa75] = puVar4[0x1dfd];
  puVar4[0xa76] = puVar4[0x1dfe];
  puVar4[-0x346] = 0x905b7b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xa69) = extraout_XMM0_Da_x01369;
  *(undefined4 *)((long)puVar4 + 0x534c) = extraout_XMM0_Db_x01369;
  *(undefined4 *)(puVar4 + 0xa6a) = extraout_XMM0_Dc_x01369;
  *(undefined4 *)((long)puVar4 + 0x5354) = extraout_XMM0_Dd_x01369;
  puVar4[-0x346] = 0x905b90;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xa67) = extraout_XMM0_Da_x01370;
  *(undefined4 *)((long)puVar4 + 0x533c) = extraout_XMM0_Db_x01370;
  *(undefined4 *)(puVar4 + 0xa68) = extraout_XMM0_Dc_x01370;
  *(undefined4 *)((long)puVar4 + 0x5344) = extraout_XMM0_Dd_x01370;
  puVar4[0xa65] = puVar4[0x1dcf];
  puVar4[0xa66] = puVar4[0x1dd0];
  puVar4[-0x346] = 0x905bb5;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x905bd5;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x905be5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xf89] = puVar4[0xa6b];
  puVar4[0xf8a] = puVar4[0xa6c];
  puVar4[0xf87] = puVar4[0xa6d];
  puVar4[0xf88] = puVar4[0xa6e];
  puVar4[0xf85] = puVar4[0xa6f];
  puVar4[0xf86] = puVar4[0xa70];
  puVar4[0xf84] = puVar4[0xcec];
  puVar4[0xf81] = puVar4[0xa71];
  puVar4[0xf82] = puVar4[0xa72];
  puVar4[0xf7f] = puVar4[0xa73];
  puVar4[0xf80] = puVar4[0xa74];
  puVar4[0xf7d] = puVar4[0xa75];
  puVar4[0xf7e] = puVar4[0xa76];
  puVar4[0xf7c] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0xf79) = extraout_XMM0_Da_x01371;
  *(undefined4 *)((long)puVar4 + 0x7bcc) = extraout_XMM0_Db_x01371;
  *(undefined4 *)(puVar4 + 0xf7a) = extraout_XMM0_Dc_x01371;
  *(undefined4 *)((long)puVar4 + 0x7bd4) = extraout_XMM0_Dd_x01371;
  uVar2 = ((undefined8 *)puVar4[0xf7c])[1];
  puVar4[0xa79] = *(undefined8 *)puVar4[0xf7c];
  puVar4[0xa7a] = uVar2;
  puVar4[-0x346] = 0x905c8d;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xa77) = extraout_XMM0_Da_x01372;
  *(undefined4 *)((long)puVar4 + 0x53bc) = extraout_XMM0_Db_x01372;
  *(undefined4 *)(puVar4 + 0xa78) = extraout_XMM0_Dc_x01372;
  *(undefined4 *)((long)puVar4 + 0x53c4) = extraout_XMM0_Dd_x01372;
  puVar4[-0x346] = 0x905cb2;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x905cd2;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xf77) = extraout_XMM0_Da_x01373;
  *(undefined4 *)((long)puVar4 + 0x7bbc) = extraout_XMM0_Db_x01373;
  *(undefined4 *)(puVar4 + 0xf78) = extraout_XMM0_Dc_x01373;
  *(undefined4 *)((long)puVar4 + 0x7bc4) = extraout_XMM0_Dd_x01373;
  puVar4[-0x346] = 0x905ce7;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xa7b) = extraout_XMM0_Da_x01374;
  *(undefined4 *)((long)puVar4 + 0x53dc) = extraout_XMM0_Db_x01374;
  *(undefined4 *)(puVar4 + 0xa7c) = extraout_XMM0_Dc_x01374;
  *(undefined4 *)((long)puVar4 + 0x53e4) = extraout_XMM0_Dd_x01374;
  puVar4[-0x346] = 0x905d0c;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x905d1c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xf75) = extraout_XMM0_Da_x01375;
  *(undefined4 *)((long)puVar4 + 0x7bac) = extraout_XMM0_Db_x01375;
  *(undefined4 *)(puVar4 + 0xf76) = extraout_XMM0_Dc_x01375;
  *(undefined4 *)((long)puVar4 + 0x7bb4) = extraout_XMM0_Dd_x01375;
  puVar4[-0x346] = 0x905d3c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xf84];
  *puVar1 = extraout_XMM0_Da_x01376;
  puVar1[1] = extraout_XMM0_Db_x01376;
  puVar1[2] = extraout_XMM0_Dc_x01376;
  puVar1[3] = extraout_XMM0_Dd_x01376;
  puVar4[-0x346] = 0x905d5c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xf7c];
  *puVar1 = extraout_XMM0_Da_x01377;
  puVar1[1] = extraout_XMM0_Db_x01377;
  puVar1[2] = extraout_XMM0_Dc_x01377;
  puVar1[3] = extraout_XMM0_Dd_x01377;
  puVar4[0xa85] = puVar4[0x1dfb];
  puVar4[0xa86] = puVar4[0x1dfc];
  puVar4[0xa87] = puVar4[0x1df9];
  puVar4[0xa88] = puVar4[0x1dfa];
  puVar4[0xa89] = puVar4[0x1df7];
  puVar4[0xa8a] = puVar4[0x1df8];
  puVar4[0xa8b] = puVar4[0x1df3];
  puVar4[0xa8c] = puVar4[0x1df4];
  puVar4[0xa8d] = puVar4[0x1df1];
  puVar4[0xa8e] = puVar4[0x1df2];
  puVar4[0xa8f] = puVar4[0x1def];
  puVar4[0xa90] = puVar4[0x1df0];
  puVar4[-0x346] = 0x905dd3;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xa83) = extraout_XMM0_Da_x01378;
  *(undefined4 *)((long)puVar4 + 0x541c) = extraout_XMM0_Db_x01378;
  *(undefined4 *)(puVar4 + 0xa84) = extraout_XMM0_Dc_x01378;
  *(undefined4 *)((long)puVar4 + 0x5424) = extraout_XMM0_Dd_x01378;
  puVar4[-0x346] = 0x905de8;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xa81) = extraout_XMM0_Da_x01379;
  *(undefined4 *)((long)puVar4 + 0x540c) = extraout_XMM0_Db_x01379;
  *(undefined4 *)(puVar4 + 0xa82) = extraout_XMM0_Dc_x01379;
  *(undefined4 *)((long)puVar4 + 0x5414) = extraout_XMM0_Dd_x01379;
  puVar4[0xa7f] = puVar4[0x1ded];
  puVar4[0xa80] = puVar4[0x1dee];
  puVar4[-0x346] = 0x905e0d;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x905e2d;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x905e3d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xf73] = puVar4[0xa85];
  puVar4[0xf74] = puVar4[0xa86];
  puVar4[0xf71] = puVar4[0xa87];
  puVar4[0xf72] = puVar4[0xa88];
  puVar4[0xf6f] = puVar4[0xa89];
  puVar4[0xf70] = puVar4[0xa8a];
  puVar4[0xf6e] = puVar4[0xd0c];
  puVar4[0xf6b] = puVar4[0xa8b];
  puVar4[0xf6c] = puVar4[0xa8c];
  puVar4[0xf69] = puVar4[0xa8d];
  puVar4[0xf6a] = puVar4[0xa8e];
  puVar4[0xf67] = puVar4[0xa8f];
  puVar4[0xf68] = puVar4[0xa90];
  puVar4[0xf66] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0xf63) = extraout_XMM0_Da_x01380;
  *(undefined4 *)((long)puVar4 + 0x7b1c) = extraout_XMM0_Db_x01380;
  *(undefined4 *)(puVar4 + 0xf64) = extraout_XMM0_Dc_x01380;
  *(undefined4 *)((long)puVar4 + 0x7b24) = extraout_XMM0_Dd_x01380;
  uVar2 = ((undefined8 *)puVar4[0xf66])[1];
  puVar4[0xa93] = *(undefined8 *)puVar4[0xf66];
  puVar4[0xa94] = uVar2;
  puVar4[-0x346] = 0x905ee5;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xa91) = extraout_XMM0_Da_x01381;
  *(undefined4 *)((long)puVar4 + 0x548c) = extraout_XMM0_Db_x01381;
  *(undefined4 *)(puVar4 + 0xa92) = extraout_XMM0_Dc_x01381;
  *(undefined4 *)((long)puVar4 + 0x5494) = extraout_XMM0_Dd_x01381;
  puVar4[-0x346] = 0x905f0a;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x905f2a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xf61) = extraout_XMM0_Da_x01382;
  *(undefined4 *)((long)puVar4 + 0x7b0c) = extraout_XMM0_Db_x01382;
  *(undefined4 *)(puVar4 + 0xf62) = extraout_XMM0_Dc_x01382;
  *(undefined4 *)((long)puVar4 + 0x7b14) = extraout_XMM0_Dd_x01382;
  puVar4[-0x346] = 0x905f3f;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xa95) = extraout_XMM0_Da_x01383;
  *(undefined4 *)((long)puVar4 + 0x54ac) = extraout_XMM0_Db_x01383;
  *(undefined4 *)(puVar4 + 0xa96) = extraout_XMM0_Dc_x01383;
  *(undefined4 *)((long)puVar4 + 0x54b4) = extraout_XMM0_Dd_x01383;
  puVar4[-0x346] = 0x905f64;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x905f74;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xf5f) = extraout_XMM0_Da_x01384;
  *(undefined4 *)((long)puVar4 + 0x7afc) = extraout_XMM0_Db_x01384;
  *(undefined4 *)(puVar4 + 0xf60) = extraout_XMM0_Dc_x01384;
  *(undefined4 *)((long)puVar4 + 0x7b04) = extraout_XMM0_Dd_x01384;
  puVar4[-0x346] = 0x905f94;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xf6e];
  *puVar1 = extraout_XMM0_Da_x01385;
  puVar1[1] = extraout_XMM0_Db_x01385;
  puVar1[2] = extraout_XMM0_Dc_x01385;
  puVar1[3] = extraout_XMM0_Dd_x01385;
  puVar4[-0x346] = 0x905fb4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xf66];
  *puVar1 = extraout_XMM0_Da_x01386;
  puVar1[1] = extraout_XMM0_Db_x01386;
  puVar1[2] = extraout_XMM0_Dc_x01386;
  puVar1[3] = extraout_XMM0_Dd_x01386;
  puVar4[0xa9f] = puVar4[0x1dfd];
  puVar4[0xaa0] = puVar4[0x1dfe];
  puVar4[0xaa1] = puVar4[0x1dfb];
  puVar4[0xaa2] = puVar4[0x1dfc];
  puVar4[0xaa3] = puVar4[0x1df9];
  puVar4[0xaa4] = puVar4[0x1dfa];
  puVar4[0xaa5] = puVar4[0x1df5];
  puVar4[0xaa6] = puVar4[0x1df6];
  puVar4[0xaa7] = puVar4[0x1df3];
  puVar4[0xaa8] = puVar4[0x1df4];
  puVar4[0xaa9] = puVar4[0x1df1];
  puVar4[0xaaa] = puVar4[0x1df2];
  puVar4[-0x346] = 0x90602b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xa9d) = extraout_XMM0_Da_x01387;
  *(undefined4 *)((long)puVar4 + 0x54ec) = extraout_XMM0_Db_x01387;
  *(undefined4 *)(puVar4 + 0xa9e) = extraout_XMM0_Dc_x01387;
  *(undefined4 *)((long)puVar4 + 0x54f4) = extraout_XMM0_Dd_x01387;
  puVar4[-0x346] = 0x906040;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xa9b) = extraout_XMM0_Da_x01388;
  *(undefined4 *)((long)puVar4 + 0x54dc) = extraout_XMM0_Db_x01388;
  *(undefined4 *)(puVar4 + 0xa9c) = extraout_XMM0_Dc_x01388;
  *(undefined4 *)((long)puVar4 + 0x54e4) = extraout_XMM0_Dd_x01388;
  puVar4[0xa99] = puVar4[0x1deb];
  puVar4[0xa9a] = puVar4[0x1dec];
  puVar4[-0x346] = 0x906065;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x906085;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x906095;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xf5d] = puVar4[0xa9f];
  puVar4[0xf5e] = puVar4[0xaa0];
  puVar4[0xf5b] = puVar4[0xaa1];
  puVar4[0xf5c] = puVar4[0xaa2];
  puVar4[0xf59] = puVar4[0xaa3];
  puVar4[0xf5a] = puVar4[0xaa4];
  puVar4[0xf58] = puVar4[0xcb6];
  puVar4[0xf55] = puVar4[0xaa5];
  puVar4[0xf56] = puVar4[0xaa6];
  puVar4[0xf53] = puVar4[0xaa7];
  puVar4[0xf54] = puVar4[0xaa8];
  puVar4[0xf51] = puVar4[0xaa9];
  puVar4[0xf52] = puVar4[0xaaa];
  puVar4[0xf50] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0xf4d) = extraout_XMM0_Da_x01389;
  *(undefined4 *)((long)puVar4 + 0x7a6c) = extraout_XMM0_Db_x01389;
  *(undefined4 *)(puVar4 + 0xf4e) = extraout_XMM0_Dc_x01389;
  *(undefined4 *)((long)puVar4 + 0x7a74) = extraout_XMM0_Dd_x01389;
  uVar2 = ((undefined8 *)puVar4[0xf50])[1];
  puVar4[0xaad] = *(undefined8 *)puVar4[0xf50];
  puVar4[0xaae] = uVar2;
  puVar4[-0x346] = 0x90613d;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xaab) = extraout_XMM0_Da_x01390;
  *(undefined4 *)((long)puVar4 + 0x555c) = extraout_XMM0_Db_x01390;
  *(undefined4 *)(puVar4 + 0xaac) = extraout_XMM0_Dc_x01390;
  *(undefined4 *)((long)puVar4 + 0x5564) = extraout_XMM0_Dd_x01390;
  puVar4[-0x346] = 0x906162;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x906182;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xf4b) = extraout_XMM0_Da_x01391;
  *(undefined4 *)((long)puVar4 + 0x7a5c) = extraout_XMM0_Db_x01391;
  *(undefined4 *)(puVar4 + 0xf4c) = extraout_XMM0_Dc_x01391;
  *(undefined4 *)((long)puVar4 + 0x7a64) = extraout_XMM0_Dd_x01391;
  puVar4[-0x346] = 0x906197;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xaaf) = extraout_XMM0_Da_x01392;
  *(undefined4 *)((long)puVar4 + 0x557c) = extraout_XMM0_Db_x01392;
  *(undefined4 *)(puVar4 + 0xab0) = extraout_XMM0_Dc_x01392;
  *(undefined4 *)((long)puVar4 + 0x5584) = extraout_XMM0_Dd_x01392;
  puVar4[-0x346] = 0x9061bc;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9061cc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xf49) = extraout_XMM0_Da_x01393;
  *(undefined4 *)((long)puVar4 + 0x7a4c) = extraout_XMM0_Db_x01393;
  *(undefined4 *)(puVar4 + 0xf4a) = extraout_XMM0_Dc_x01393;
  *(undefined4 *)((long)puVar4 + 0x7a54) = extraout_XMM0_Dd_x01393;
  puVar4[-0x346] = 0x9061ec;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xf58];
  *puVar1 = extraout_XMM0_Da_x01394;
  puVar1[1] = extraout_XMM0_Db_x01394;
  puVar1[2] = extraout_XMM0_Dc_x01394;
  puVar1[3] = extraout_XMM0_Dd_x01394;
  puVar4[-0x346] = 0x90620c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xf50];
  *puVar1 = extraout_XMM0_Da_x01395;
  puVar1[1] = extraout_XMM0_Db_x01395;
  puVar1[2] = extraout_XMM0_Dc_x01395;
  puVar1[3] = extraout_XMM0_Dd_x01395;
  puVar4[0xab9] = puVar4[0x1def];
  puVar4[0xaba] = puVar4[0x1df0];
  puVar4[0xabb] = puVar4[0x1dfd];
  puVar4[0xabc] = puVar4[0x1dfe];
  puVar4[0xabd] = puVar4[0x1dfb];
  puVar4[0xabe] = puVar4[0x1dfc];
  puVar4[0xabf] = puVar4[0x1df7];
  puVar4[0xac0] = puVar4[0x1df8];
  puVar4[0xac1] = puVar4[0x1df5];
  puVar4[0xac2] = puVar4[0x1df6];
  puVar4[0xac3] = puVar4[0x1df3];
  puVar4[0xac4] = puVar4[0x1df4];
  puVar4[-0x346] = 0x906283;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xab7) = extraout_XMM0_Da_x01396;
  *(undefined4 *)((long)puVar4 + 0x55bc) = extraout_XMM0_Db_x01396;
  *(undefined4 *)(puVar4 + 0xab8) = extraout_XMM0_Dc_x01396;
  *(undefined4 *)((long)puVar4 + 0x55c4) = extraout_XMM0_Dd_x01396;
  puVar4[-0x346] = 0x906298;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xab5) = extraout_XMM0_Da_x01397;
  *(undefined4 *)((long)puVar4 + 0x55ac) = extraout_XMM0_Db_x01397;
  *(undefined4 *)(puVar4 + 0xab6) = extraout_XMM0_Dc_x01397;
  *(undefined4 *)((long)puVar4 + 0x55b4) = extraout_XMM0_Dd_x01397;
  puVar4[0xab3] = puVar4[0x1de9];
  puVar4[0xab4] = puVar4[0x1dea];
  puVar4[-0x346] = 0x9062bd;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x9062dd;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x9062ed;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xf47] = puVar4[0xab9];
  puVar4[0xf48] = puVar4[0xaba];
  puVar4[0xf45] = puVar4[0xabb];
  puVar4[0xf46] = puVar4[0xabc];
  puVar4[0xf43] = puVar4[0xabd];
  puVar4[0xf44] = puVar4[0xabe];
  puVar4[0xf42] = puVar4[0xcd4];
  puVar4[0xf3f] = puVar4[0xabf];
  puVar4[0xf40] = puVar4[0xac0];
  puVar4[0xf3d] = puVar4[0xac1];
  puVar4[0xf3e] = puVar4[0xac2];
  puVar4[0xf3b] = puVar4[0xac3];
  puVar4[0xf3c] = puVar4[0xac4];
  puVar4[0xf3a] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0xf37) = extraout_XMM0_Da_x01398;
  *(undefined4 *)((long)puVar4 + 0x79bc) = extraout_XMM0_Db_x01398;
  *(undefined4 *)(puVar4 + 0xf38) = extraout_XMM0_Dc_x01398;
  *(undefined4 *)((long)puVar4 + 0x79c4) = extraout_XMM0_Dd_x01398;
  uVar2 = ((undefined8 *)puVar4[0xf3a])[1];
  puVar4[0xac7] = *(undefined8 *)puVar4[0xf3a];
  puVar4[0xac8] = uVar2;
  puVar4[-0x346] = 0x906395;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xac5) = extraout_XMM0_Da_x01399;
  *(undefined4 *)((long)puVar4 + 0x562c) = extraout_XMM0_Db_x01399;
  *(undefined4 *)(puVar4 + 0xac6) = extraout_XMM0_Dc_x01399;
  *(undefined4 *)((long)puVar4 + 0x5634) = extraout_XMM0_Dd_x01399;
  puVar4[-0x346] = 0x9063ba;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9063da;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xf35) = extraout_XMM0_Da_x01400;
  *(undefined4 *)((long)puVar4 + 0x79ac) = extraout_XMM0_Db_x01400;
  *(undefined4 *)(puVar4 + 0xf36) = extraout_XMM0_Dc_x01400;
  *(undefined4 *)((long)puVar4 + 0x79b4) = extraout_XMM0_Dd_x01400;
  puVar4[-0x346] = 0x9063ef;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xac9) = extraout_XMM0_Da_x01401;
  *(undefined4 *)((long)puVar4 + 0x564c) = extraout_XMM0_Db_x01401;
  *(undefined4 *)(puVar4 + 0xaca) = extraout_XMM0_Dc_x01401;
  *(undefined4 *)((long)puVar4 + 0x5654) = extraout_XMM0_Dd_x01401;
  puVar4[-0x346] = 0x906414;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x906424;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xf33) = extraout_XMM0_Da_x01402;
  *(undefined4 *)((long)puVar4 + 0x799c) = extraout_XMM0_Db_x01402;
  *(undefined4 *)(puVar4 + 0xf34) = extraout_XMM0_Dc_x01402;
  *(undefined4 *)((long)puVar4 + 0x79a4) = extraout_XMM0_Dd_x01402;
  puVar4[-0x346] = 0x906444;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xf42];
  *puVar1 = extraout_XMM0_Da_x01403;
  puVar1[1] = extraout_XMM0_Db_x01403;
  puVar1[2] = extraout_XMM0_Dc_x01403;
  puVar1[3] = extraout_XMM0_Dd_x01403;
  puVar4[-0x346] = 0x906464;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xf3a];
  *puVar1 = extraout_XMM0_Da_x01404;
  puVar1[1] = extraout_XMM0_Db_x01404;
  puVar1[2] = extraout_XMM0_Dc_x01404;
  puVar1[3] = extraout_XMM0_Dd_x01404;
  puVar4[0xad3] = puVar4[0x1df1];
  puVar4[0xad4] = puVar4[0x1df2];
  puVar4[0xad5] = puVar4[0x1def];
  puVar4[0xad6] = puVar4[0x1df0];
  puVar4[0xad7] = puVar4[0x1dfd];
  puVar4[0xad8] = puVar4[0x1dfe];
  puVar4[0xad9] = puVar4[0x1df9];
  puVar4[0xada] = puVar4[0x1dfa];
  puVar4[0xadb] = puVar4[0x1df7];
  puVar4[0xadc] = puVar4[0x1df8];
  puVar4[0xadd] = puVar4[0x1df5];
  puVar4[0xade] = puVar4[0x1df6];
  puVar4[-0x346] = 0x9064db;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xad1) = extraout_XMM0_Da_x01405;
  *(undefined4 *)((long)puVar4 + 0x568c) = extraout_XMM0_Db_x01405;
  *(undefined4 *)(puVar4 + 0xad2) = extraout_XMM0_Dc_x01405;
  *(undefined4 *)((long)puVar4 + 0x5694) = extraout_XMM0_Dd_x01405;
  puVar4[-0x346] = 0x9064f0;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xacf) = extraout_XMM0_Da_x01406;
  *(undefined4 *)((long)puVar4 + 0x567c) = extraout_XMM0_Db_x01406;
  *(undefined4 *)(puVar4 + 0xad0) = extraout_XMM0_Dc_x01406;
  *(undefined4 *)((long)puVar4 + 0x5684) = extraout_XMM0_Dd_x01406;
  puVar4[0xacd] = puVar4[0x1de7];
  puVar4[0xace] = puVar4[0x1de8];
  puVar4[-0x346] = 0x906515;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x906535;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x906545;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xf31] = puVar4[0xad3];
  puVar4[0xf32] = puVar4[0xad4];
  puVar4[0xf2f] = puVar4[0xad5];
  puVar4[0xf30] = puVar4[0xad6];
  puVar4[0xf2d] = puVar4[0xad7];
  puVar4[0xf2e] = puVar4[0xad8];
  puVar4[0xf2c] = puVar4[0xcf4];
  puVar4[0xf29] = puVar4[0xad9];
  puVar4[0xf2a] = puVar4[0xada];
  puVar4[0xf27] = puVar4[0xadb];
  puVar4[0xf28] = puVar4[0xadc];
  puVar4[0xf25] = puVar4[0xadd];
  puVar4[0xf26] = puVar4[0xade];
  puVar4[0xf24] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0xf21) = extraout_XMM0_Da_x01407;
  *(undefined4 *)((long)puVar4 + 0x790c) = extraout_XMM0_Db_x01407;
  *(undefined4 *)(puVar4 + 0xf22) = extraout_XMM0_Dc_x01407;
  *(undefined4 *)((long)puVar4 + 0x7914) = extraout_XMM0_Dd_x01407;
  uVar2 = ((undefined8 *)puVar4[0xf24])[1];
  puVar4[0xae1] = *(undefined8 *)puVar4[0xf24];
  puVar4[0xae2] = uVar2;
  puVar4[-0x346] = 0x9065ed;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xadf) = extraout_XMM0_Da_x01408;
  *(undefined4 *)((long)puVar4 + 0x56fc) = extraout_XMM0_Db_x01408;
  *(undefined4 *)(puVar4 + 0xae0) = extraout_XMM0_Dc_x01408;
  *(undefined4 *)((long)puVar4 + 0x5704) = extraout_XMM0_Dd_x01408;
  puVar4[-0x346] = 0x906612;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x906632;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xf1f) = extraout_XMM0_Da_x01409;
  *(undefined4 *)((long)puVar4 + 0x78fc) = extraout_XMM0_Db_x01409;
  *(undefined4 *)(puVar4 + 0xf20) = extraout_XMM0_Dc_x01409;
  *(undefined4 *)((long)puVar4 + 0x7904) = extraout_XMM0_Dd_x01409;
  puVar4[-0x346] = 0x906647;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xae3) = extraout_XMM0_Da_x01410;
  *(undefined4 *)((long)puVar4 + 0x571c) = extraout_XMM0_Db_x01410;
  *(undefined4 *)(puVar4 + 0xae4) = extraout_XMM0_Dc_x01410;
  *(undefined4 *)((long)puVar4 + 0x5724) = extraout_XMM0_Dd_x01410;
  puVar4[-0x346] = 0x90666c;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90667c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xf1d) = extraout_XMM0_Da_x01411;
  *(undefined4 *)((long)puVar4 + 0x78ec) = extraout_XMM0_Db_x01411;
  *(undefined4 *)(puVar4 + 0xf1e) = extraout_XMM0_Dc_x01411;
  *(undefined4 *)((long)puVar4 + 0x78f4) = extraout_XMM0_Dd_x01411;
  puVar4[-0x346] = 0x90669c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xf2c];
  *puVar1 = extraout_XMM0_Da_x01412;
  puVar1[1] = extraout_XMM0_Db_x01412;
  puVar1[2] = extraout_XMM0_Dc_x01412;
  puVar1[3] = extraout_XMM0_Dd_x01412;
  puVar4[-0x346] = 0x9066bc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xf24];
  *puVar1 = extraout_XMM0_Da_x01413;
  puVar1[1] = extraout_XMM0_Db_x01413;
  puVar1[2] = extraout_XMM0_Dc_x01413;
  puVar1[3] = extraout_XMM0_Dd_x01413;
  puVar4[0xaed] = puVar4[0x1df3];
  puVar4[0xaee] = puVar4[0x1df4];
  puVar4[0xaef] = puVar4[0x1df1];
  puVar4[0xaf0] = puVar4[0x1df2];
  puVar4[0xaf1] = puVar4[0x1def];
  puVar4[0xaf2] = puVar4[0x1df0];
  puVar4[0xaf3] = puVar4[0x1dfb];
  puVar4[0xaf4] = puVar4[0x1dfc];
  puVar4[0xaf5] = puVar4[0x1df9];
  puVar4[0xaf6] = puVar4[0x1dfa];
  puVar4[0xaf7] = puVar4[0x1df7];
  puVar4[0xaf8] = puVar4[0x1df8];
  puVar4[-0x346] = 0x906733;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xaeb) = extraout_XMM0_Da_x01414;
  *(undefined4 *)((long)puVar4 + 0x575c) = extraout_XMM0_Db_x01414;
  *(undefined4 *)(puVar4 + 0xaec) = extraout_XMM0_Dc_x01414;
  *(undefined4 *)((long)puVar4 + 0x5764) = extraout_XMM0_Dd_x01414;
  puVar4[-0x346] = 0x906748;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xae9) = extraout_XMM0_Da_x01415;
  *(undefined4 *)((long)puVar4 + 0x574c) = extraout_XMM0_Db_x01415;
  *(undefined4 *)(puVar4 + 0xaea) = extraout_XMM0_Dc_x01415;
  *(undefined4 *)((long)puVar4 + 0x5754) = extraout_XMM0_Dd_x01415;
  puVar4[0xae7] = puVar4[0x1de5];
  puVar4[0xae8] = puVar4[0x1de6];
  puVar4[-0x346] = 0x90676d;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x90678d;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x90679d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xf1b] = puVar4[0xaed];
  puVar4[0xf1c] = puVar4[0xaee];
  puVar4[0xf19] = puVar4[0xaef];
  puVar4[0xf1a] = puVar4[0xaf0];
  puVar4[0xf17] = puVar4[0xaf1];
  puVar4[0xf18] = puVar4[0xaf2];
  puVar4[0xf16] = puVar4[0xd14];
  puVar4[0xf13] = puVar4[0xaf3];
  puVar4[0xf14] = puVar4[0xaf4];
  puVar4[0xf11] = puVar4[0xaf5];
  puVar4[0xf12] = puVar4[0xaf6];
  puVar4[0xf0f] = puVar4[0xaf7];
  puVar4[0xf10] = puVar4[0xaf8];
  puVar4[0xf0e] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0xf0b) = extraout_XMM0_Da_x01416;
  *(undefined4 *)((long)puVar4 + 0x785c) = extraout_XMM0_Db_x01416;
  *(undefined4 *)(puVar4 + 0xf0c) = extraout_XMM0_Dc_x01416;
  *(undefined4 *)((long)puVar4 + 0x7864) = extraout_XMM0_Dd_x01416;
  uVar2 = ((undefined8 *)puVar4[0xf0e])[1];
  puVar4[0xafb] = *(undefined8 *)puVar4[0xf0e];
  puVar4[0xafc] = uVar2;
  puVar4[-0x346] = 0x906845;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xaf9) = extraout_XMM0_Da_x01417;
  *(undefined4 *)((long)puVar4 + 0x57cc) = extraout_XMM0_Db_x01417;
  *(undefined4 *)(puVar4 + 0xafa) = extraout_XMM0_Dc_x01417;
  *(undefined4 *)((long)puVar4 + 0x57d4) = extraout_XMM0_Dd_x01417;
  puVar4[-0x346] = 0x90686a;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90688a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xf09) = extraout_XMM0_Da_x01418;
  *(undefined4 *)((long)puVar4 + 0x784c) = extraout_XMM0_Db_x01418;
  *(undefined4 *)(puVar4 + 0xf0a) = extraout_XMM0_Dc_x01418;
  *(undefined4 *)((long)puVar4 + 0x7854) = extraout_XMM0_Dd_x01418;
  puVar4[-0x346] = 0x90689f;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xafd) = extraout_XMM0_Da_x01419;
  *(undefined4 *)((long)puVar4 + 0x57ec) = extraout_XMM0_Db_x01419;
  *(undefined4 *)(puVar4 + 0xafe) = extraout_XMM0_Dc_x01419;
  *(undefined4 *)((long)puVar4 + 0x57f4) = extraout_XMM0_Dd_x01419;
  puVar4[-0x346] = 0x9068c4;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9068d4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xf07) = extraout_XMM0_Da_x01420;
  *(undefined4 *)((long)puVar4 + 0x783c) = extraout_XMM0_Db_x01420;
  *(undefined4 *)(puVar4 + 0xf08) = extraout_XMM0_Dc_x01420;
  *(undefined4 *)((long)puVar4 + 0x7844) = extraout_XMM0_Dd_x01420;
  puVar4[-0x346] = 0x9068f4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xf16];
  *puVar1 = extraout_XMM0_Da_x01421;
  puVar1[1] = extraout_XMM0_Db_x01421;
  puVar1[2] = extraout_XMM0_Dc_x01421;
  puVar1[3] = extraout_XMM0_Dd_x01421;
  puVar4[-0x346] = 0x906914;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xf0e];
  *puVar1 = extraout_XMM0_Da_x01422;
  puVar1[1] = extraout_XMM0_Db_x01422;
  puVar1[2] = extraout_XMM0_Dc_x01422;
  puVar1[3] = extraout_XMM0_Dd_x01422;
  puVar4[0xb07] = puVar4[0x1df5];
  puVar4[0xb08] = puVar4[0x1df6];
  puVar4[0xb09] = puVar4[0x1df3];
  puVar4[0xb0a] = puVar4[0x1df4];
  puVar4[0xb0b] = puVar4[0x1df1];
  puVar4[0xb0c] = puVar4[0x1df2];
  puVar4[0xb0d] = puVar4[0x1dfd];
  puVar4[0xb0e] = puVar4[0x1dfe];
  puVar4[0xb0f] = puVar4[0x1dfb];
  puVar4[0xb10] = puVar4[0x1dfc];
  puVar4[0xb11] = puVar4[0x1df9];
  puVar4[0xb12] = puVar4[0x1dfa];
  puVar4[-0x346] = 0x90698b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xb05) = extraout_XMM0_Da_x01423;
  *(undefined4 *)((long)puVar4 + 0x582c) = extraout_XMM0_Db_x01423;
  *(undefined4 *)(puVar4 + 0xb06) = extraout_XMM0_Dc_x01423;
  *(undefined4 *)((long)puVar4 + 0x5834) = extraout_XMM0_Dd_x01423;
  puVar4[-0x346] = 0x9069a0;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xb03) = extraout_XMM0_Da_x01424;
  *(undefined4 *)((long)puVar4 + 0x581c) = extraout_XMM0_Db_x01424;
  *(undefined4 *)(puVar4 + 0xb04) = extraout_XMM0_Dc_x01424;
  *(undefined4 *)((long)puVar4 + 0x5824) = extraout_XMM0_Dd_x01424;
  puVar4[0xb01] = puVar4[0x1de3];
  puVar4[0xb02] = puVar4[0x1de4];
  puVar4[-0x346] = 0x9069c5;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x9069e5;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x9069f5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xf05] = puVar4[0xb07];
  puVar4[0xf06] = puVar4[0xb08];
  puVar4[0xf03] = puVar4[0xb09];
  puVar4[0xf04] = puVar4[0xb0a];
  puVar4[0xf01] = puVar4[0xb0b];
  puVar4[0xf02] = puVar4[0xb0c];
  puVar4[0xf00] = puVar4[0xcae];
  puVar4[0xefd] = puVar4[0xb0d];
  puVar4[0xefe] = puVar4[0xb0e];
  puVar4[0xefb] = puVar4[0xb0f];
  puVar4[0xefc] = puVar4[0xb10];
  puVar4[0xef9] = puVar4[0xb11];
  puVar4[0xefa] = puVar4[0xb12];
  puVar4[0xef8] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0xef5) = extraout_XMM0_Da_x01425;
  *(undefined4 *)((long)puVar4 + 0x77ac) = extraout_XMM0_Db_x01425;
  *(undefined4 *)(puVar4 + 0xef6) = extraout_XMM0_Dc_x01425;
  *(undefined4 *)((long)puVar4 + 0x77b4) = extraout_XMM0_Dd_x01425;
  uVar2 = ((undefined8 *)puVar4[0xef8])[1];
  puVar4[0xb15] = *(undefined8 *)puVar4[0xef8];
  puVar4[0xb16] = uVar2;
  puVar4[-0x346] = 0x906a9d;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xb13) = extraout_XMM0_Da_x01426;
  *(undefined4 *)((long)puVar4 + 0x589c) = extraout_XMM0_Db_x01426;
  *(undefined4 *)(puVar4 + 0xb14) = extraout_XMM0_Dc_x01426;
  *(undefined4 *)((long)puVar4 + 0x58a4) = extraout_XMM0_Dd_x01426;
  puVar4[-0x346] = 0x906ac2;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x906ae2;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xef3) = extraout_XMM0_Da_x01427;
  *(undefined4 *)((long)puVar4 + 0x779c) = extraout_XMM0_Db_x01427;
  *(undefined4 *)(puVar4 + 0xef4) = extraout_XMM0_Dc_x01427;
  *(undefined4 *)((long)puVar4 + 0x77a4) = extraout_XMM0_Dd_x01427;
  puVar4[-0x346] = 0x906af7;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xb17) = extraout_XMM0_Da_x01428;
  *(undefined4 *)((long)puVar4 + 0x58bc) = extraout_XMM0_Db_x01428;
  *(undefined4 *)(puVar4 + 0xb18) = extraout_XMM0_Dc_x01428;
  *(undefined4 *)((long)puVar4 + 0x58c4) = extraout_XMM0_Dd_x01428;
  puVar4[-0x346] = 0x906b1c;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x906b2c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xef1) = extraout_XMM0_Da_x01429;
  *(undefined4 *)((long)puVar4 + 0x778c) = extraout_XMM0_Db_x01429;
  *(undefined4 *)(puVar4 + 0xef2) = extraout_XMM0_Dc_x01429;
  *(undefined4 *)((long)puVar4 + 0x7794) = extraout_XMM0_Dd_x01429;
  puVar4[-0x346] = 0x906b4c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xf00];
  *puVar1 = extraout_XMM0_Da_x01430;
  puVar1[1] = extraout_XMM0_Db_x01430;
  puVar1[2] = extraout_XMM0_Dc_x01430;
  puVar1[3] = extraout_XMM0_Dd_x01430;
  puVar4[-0x346] = 0x906b6c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xef8];
  *puVar1 = extraout_XMM0_Da_x01431;
  puVar1[1] = extraout_XMM0_Db_x01431;
  puVar1[2] = extraout_XMM0_Dc_x01431;
  puVar1[3] = extraout_XMM0_Dd_x01431;
  puVar4[0xb21] = puVar4[0x1df7];
  puVar4[0xb22] = puVar4[0x1df8];
  puVar4[0xb23] = puVar4[0x1df5];
  puVar4[0xb24] = puVar4[0x1df6];
  puVar4[0xb25] = puVar4[0x1df3];
  puVar4[0xb26] = puVar4[0x1df4];
  puVar4[0xb27] = puVar4[0x1def];
  puVar4[0xb28] = puVar4[0x1df0];
  puVar4[0xb29] = puVar4[0x1dfd];
  puVar4[0xb2a] = puVar4[0x1dfe];
  puVar4[0xb2b] = puVar4[0x1dfb];
  puVar4[0xb2c] = puVar4[0x1dfc];
  puVar4[-0x346] = 0x906be3;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xb1f) = extraout_XMM0_Da_x01432;
  *(undefined4 *)((long)puVar4 + 0x58fc) = extraout_XMM0_Db_x01432;
  *(undefined4 *)(puVar4 + 0xb20) = extraout_XMM0_Dc_x01432;
  *(undefined4 *)((long)puVar4 + 0x5904) = extraout_XMM0_Dd_x01432;
  puVar4[-0x346] = 0x906bf8;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xb1d) = extraout_XMM0_Da_x01433;
  *(undefined4 *)((long)puVar4 + 0x58ec) = extraout_XMM0_Db_x01433;
  *(undefined4 *)(puVar4 + 0xb1e) = extraout_XMM0_Dc_x01433;
  *(undefined4 *)((long)puVar4 + 0x58f4) = extraout_XMM0_Dd_x01433;
  puVar4[0xb1b] = puVar4[0x1de1];
  puVar4[0xb1c] = puVar4[0x1de2];
  puVar4[-0x346] = 0x906c1d;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x906c3d;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x906c4d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xeef] = puVar4[0xb21];
  puVar4[0xef0] = puVar4[0xb22];
  puVar4[0xeed] = puVar4[0xb23];
  puVar4[0xeee] = puVar4[0xb24];
  puVar4[0xeeb] = puVar4[0xb25];
  puVar4[0xeec] = puVar4[0xb26];
  puVar4[0xeea] = puVar4[0xccc];
  puVar4[0xee7] = puVar4[0xb27];
  puVar4[0xee8] = puVar4[0xb28];
  puVar4[0xee5] = puVar4[0xb29];
  puVar4[0xee6] = puVar4[0xb2a];
  puVar4[0xee3] = puVar4[0xb2b];
  puVar4[0xee4] = puVar4[0xb2c];
  puVar4[0xee2] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0xedf) = extraout_XMM0_Da_x01434;
  *(undefined4 *)((long)puVar4 + 0x76fc) = extraout_XMM0_Db_x01434;
  *(undefined4 *)(puVar4 + 0xee0) = extraout_XMM0_Dc_x01434;
  *(undefined4 *)((long)puVar4 + 0x7704) = extraout_XMM0_Dd_x01434;
  uVar2 = ((undefined8 *)puVar4[0xee2])[1];
  puVar4[0xb2f] = *(undefined8 *)puVar4[0xee2];
  puVar4[0xb30] = uVar2;
  puVar4[-0x346] = 0x906cf5;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xb2d) = extraout_XMM0_Da_x01435;
  *(undefined4 *)((long)puVar4 + 0x596c) = extraout_XMM0_Db_x01435;
  *(undefined4 *)(puVar4 + 0xb2e) = extraout_XMM0_Dc_x01435;
  *(undefined4 *)((long)puVar4 + 0x5974) = extraout_XMM0_Dd_x01435;
  puVar4[-0x346] = 0x906d1a;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x906d3a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xedd) = extraout_XMM0_Da_x01436;
  *(undefined4 *)((long)puVar4 + 0x76ec) = extraout_XMM0_Db_x01436;
  *(undefined4 *)(puVar4 + 0xede) = extraout_XMM0_Dc_x01436;
  *(undefined4 *)((long)puVar4 + 0x76f4) = extraout_XMM0_Dd_x01436;
  puVar4[-0x346] = 0x906d4f;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xb31) = extraout_XMM0_Da_x01437;
  *(undefined4 *)((long)puVar4 + 0x598c) = extraout_XMM0_Db_x01437;
  *(undefined4 *)(puVar4 + 0xb32) = extraout_XMM0_Dc_x01437;
  *(undefined4 *)((long)puVar4 + 0x5994) = extraout_XMM0_Dd_x01437;
  puVar4[-0x346] = 0x906d74;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x906d84;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xedb) = extraout_XMM0_Da_x01438;
  *(undefined4 *)((long)puVar4 + 0x76dc) = extraout_XMM0_Db_x01438;
  *(undefined4 *)(puVar4 + 0xedc) = extraout_XMM0_Dc_x01438;
  *(undefined4 *)((long)puVar4 + 0x76e4) = extraout_XMM0_Dd_x01438;
  puVar4[-0x346] = 0x906da4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xeea];
  *puVar1 = extraout_XMM0_Da_x01439;
  puVar1[1] = extraout_XMM0_Db_x01439;
  puVar1[2] = extraout_XMM0_Dc_x01439;
  puVar1[3] = extraout_XMM0_Dd_x01439;
  puVar4[-0x346] = 0x906dc4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xee2];
  *puVar1 = extraout_XMM0_Da_x01440;
  puVar1[1] = extraout_XMM0_Db_x01440;
  puVar1[2] = extraout_XMM0_Dc_x01440;
  puVar1[3] = extraout_XMM0_Dd_x01440;
  puVar4[0xb3b] = puVar4[0x1df9];
  puVar4[0xb3c] = puVar4[0x1dfa];
  puVar4[0xb3d] = puVar4[0x1df7];
  puVar4[0xb3e] = puVar4[0x1df8];
  puVar4[0xb3f] = puVar4[0x1df5];
  puVar4[0xb40] = puVar4[0x1df6];
  puVar4[0xb41] = puVar4[0x1df1];
  puVar4[0xb42] = puVar4[0x1df2];
  puVar4[0xb43] = puVar4[0x1def];
  puVar4[0xb44] = puVar4[0x1df0];
  puVar4[0xb45] = puVar4[0x1dfd];
  puVar4[0xb46] = puVar4[0x1dfe];
  puVar4[-0x346] = 0x906e3b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xb39) = extraout_XMM0_Da_x01441;
  *(undefined4 *)((long)puVar4 + 0x59cc) = extraout_XMM0_Db_x01441;
  *(undefined4 *)(puVar4 + 0xb3a) = extraout_XMM0_Dc_x01441;
  *(undefined4 *)((long)puVar4 + 0x59d4) = extraout_XMM0_Dd_x01441;
  puVar4[-0x346] = 0x906e50;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xb37) = extraout_XMM0_Da_x01442;
  *(undefined4 *)((long)puVar4 + 0x59bc) = extraout_XMM0_Db_x01442;
  *(undefined4 *)(puVar4 + 0xb38) = extraout_XMM0_Dc_x01442;
  *(undefined4 *)((long)puVar4 + 0x59c4) = extraout_XMM0_Dd_x01442;
  puVar4[0xb35] = puVar4[0x1ddf];
  puVar4[0xb36] = puVar4[0x1de0];
  puVar4[-0x346] = 0x906e75;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x906e95;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x906ea5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xed9] = puVar4[0xb3b];
  puVar4[0xeda] = puVar4[0xb3c];
  puVar4[0xed7] = puVar4[0xb3d];
  puVar4[0xed8] = puVar4[0xb3e];
  puVar4[0xed5] = puVar4[0xb3f];
  puVar4[0xed6] = puVar4[0xb40];
  puVar4[0xed4] = puVar4[0xcec];
  puVar4[0xed1] = puVar4[0xb41];
  puVar4[0xed2] = puVar4[0xb42];
  puVar4[0xecf] = puVar4[0xb43];
  puVar4[0xed0] = puVar4[0xb44];
  puVar4[0xecd] = puVar4[0xb45];
  puVar4[0xece] = puVar4[0xb46];
  puVar4[0xecc] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0xec9) = extraout_XMM0_Da_x01443;
  *(undefined4 *)((long)puVar4 + 0x764c) = extraout_XMM0_Db_x01443;
  *(undefined4 *)(puVar4 + 0xeca) = extraout_XMM0_Dc_x01443;
  *(undefined4 *)((long)puVar4 + 0x7654) = extraout_XMM0_Dd_x01443;
  uVar2 = ((undefined8 *)puVar4[0xecc])[1];
  puVar4[0xb49] = *(undefined8 *)puVar4[0xecc];
  puVar4[0xb4a] = uVar2;
  puVar4[-0x346] = 0x906f4d;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xb47) = extraout_XMM0_Da_x01444;
  *(undefined4 *)((long)puVar4 + 0x5a3c) = extraout_XMM0_Db_x01444;
  *(undefined4 *)(puVar4 + 0xb48) = extraout_XMM0_Dc_x01444;
  *(undefined4 *)((long)puVar4 + 0x5a44) = extraout_XMM0_Dd_x01444;
  puVar4[-0x346] = 0x906f72;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x906f92;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xec7) = extraout_XMM0_Da_x01445;
  *(undefined4 *)((long)puVar4 + 0x763c) = extraout_XMM0_Db_x01445;
  *(undefined4 *)(puVar4 + 0xec8) = extraout_XMM0_Dc_x01445;
  *(undefined4 *)((long)puVar4 + 0x7644) = extraout_XMM0_Dd_x01445;
  puVar4[-0x346] = 0x906fa7;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xb4b) = extraout_XMM0_Da_x01446;
  *(undefined4 *)((long)puVar4 + 0x5a5c) = extraout_XMM0_Db_x01446;
  *(undefined4 *)(puVar4 + 0xb4c) = extraout_XMM0_Dc_x01446;
  *(undefined4 *)((long)puVar4 + 0x5a64) = extraout_XMM0_Dd_x01446;
  puVar4[-0x346] = 0x906fcc;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x906fdc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xec5) = extraout_XMM0_Da_x01447;
  *(undefined4 *)((long)puVar4 + 0x762c) = extraout_XMM0_Db_x01447;
  *(undefined4 *)(puVar4 + 0xec6) = extraout_XMM0_Dc_x01447;
  *(undefined4 *)((long)puVar4 + 0x7634) = extraout_XMM0_Dd_x01447;
  puVar4[-0x346] = 0x906ffc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xed4];
  *puVar1 = extraout_XMM0_Da_x01448;
  puVar1[1] = extraout_XMM0_Db_x01448;
  puVar1[2] = extraout_XMM0_Dc_x01448;
  puVar1[3] = extraout_XMM0_Dd_x01448;
  puVar4[-0x346] = 0x90701c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xecc];
  *puVar1 = extraout_XMM0_Da_x01449;
  puVar1[1] = extraout_XMM0_Db_x01449;
  puVar1[2] = extraout_XMM0_Dc_x01449;
  puVar1[3] = extraout_XMM0_Dd_x01449;
  puVar4[0xb55] = puVar4[0x1dfb];
  puVar4[0xb56] = puVar4[0x1dfc];
  puVar4[0xb57] = puVar4[0x1df9];
  puVar4[0xb58] = puVar4[0x1dfa];
  puVar4[0xb59] = puVar4[0x1df7];
  puVar4[0xb5a] = puVar4[0x1df8];
  puVar4[0xb5b] = puVar4[0x1df3];
  puVar4[0xb5c] = puVar4[0x1df4];
  puVar4[0xb5d] = puVar4[0x1df1];
  puVar4[0xb5e] = puVar4[0x1df2];
  puVar4[0xb5f] = puVar4[0x1def];
  puVar4[0xb60] = puVar4[0x1df0];
  puVar4[-0x346] = 0x907093;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xb53) = extraout_XMM0_Da_x01450;
  *(undefined4 *)((long)puVar4 + 0x5a9c) = extraout_XMM0_Db_x01450;
  *(undefined4 *)(puVar4 + 0xb54) = extraout_XMM0_Dc_x01450;
  *(undefined4 *)((long)puVar4 + 0x5aa4) = extraout_XMM0_Dd_x01450;
  puVar4[-0x346] = 0x9070a8;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xb51) = extraout_XMM0_Da_x01451;
  *(undefined4 *)((long)puVar4 + 0x5a8c) = extraout_XMM0_Db_x01451;
  *(undefined4 *)(puVar4 + 0xb52) = extraout_XMM0_Dc_x01451;
  *(undefined4 *)((long)puVar4 + 0x5a94) = extraout_XMM0_Dd_x01451;
  puVar4[0xb4f] = puVar4[0x1ddd];
  puVar4[0xb50] = puVar4[0x1dde];
  puVar4[-0x346] = 0x9070cd;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x9070ed;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x9070fd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xec3] = puVar4[0xb55];
  puVar4[0xec4] = puVar4[0xb56];
  puVar4[0xec1] = puVar4[0xb57];
  puVar4[0xec2] = puVar4[0xb58];
  puVar4[0xebf] = puVar4[0xb59];
  puVar4[0xec0] = puVar4[0xb5a];
  puVar4[0xebe] = puVar4[0xd0c];
  puVar4[0xebb] = puVar4[0xb5b];
  puVar4[0xebc] = puVar4[0xb5c];
  puVar4[0xeb9] = puVar4[0xb5d];
  puVar4[0xeba] = puVar4[0xb5e];
  puVar4[0xeb7] = puVar4[0xb5f];
  puVar4[0xeb8] = puVar4[0xb60];
  puVar4[0xeb6] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0xeb3) = extraout_XMM0_Da_x01452;
  *(undefined4 *)((long)puVar4 + 0x759c) = extraout_XMM0_Db_x01452;
  *(undefined4 *)(puVar4 + 0xeb4) = extraout_XMM0_Dc_x01452;
  *(undefined4 *)((long)puVar4 + 0x75a4) = extraout_XMM0_Dd_x01452;
  uVar2 = ((undefined8 *)puVar4[0xeb6])[1];
  puVar4[0xb63] = *(undefined8 *)puVar4[0xeb6];
  puVar4[0xb64] = uVar2;
  puVar4[-0x346] = 0x9071a5;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xb61) = extraout_XMM0_Da_x01453;
  *(undefined4 *)((long)puVar4 + 0x5b0c) = extraout_XMM0_Db_x01453;
  *(undefined4 *)(puVar4 + 0xb62) = extraout_XMM0_Dc_x01453;
  *(undefined4 *)((long)puVar4 + 0x5b14) = extraout_XMM0_Dd_x01453;
  puVar4[-0x346] = 0x9071ca;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9071ea;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xeb1) = extraout_XMM0_Da_x01454;
  *(undefined4 *)((long)puVar4 + 0x758c) = extraout_XMM0_Db_x01454;
  *(undefined4 *)(puVar4 + 0xeb2) = extraout_XMM0_Dc_x01454;
  *(undefined4 *)((long)puVar4 + 0x7594) = extraout_XMM0_Dd_x01454;
  puVar4[-0x346] = 0x9071ff;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xb65) = extraout_XMM0_Da_x01455;
  *(undefined4 *)((long)puVar4 + 0x5b2c) = extraout_XMM0_Db_x01455;
  *(undefined4 *)(puVar4 + 0xb66) = extraout_XMM0_Dc_x01455;
  *(undefined4 *)((long)puVar4 + 0x5b34) = extraout_XMM0_Dd_x01455;
  puVar4[-0x346] = 0x907224;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x907234;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xeaf) = extraout_XMM0_Da_x01456;
  *(undefined4 *)((long)puVar4 + 0x757c) = extraout_XMM0_Db_x01456;
  *(undefined4 *)(puVar4 + 0xeb0) = extraout_XMM0_Dc_x01456;
  *(undefined4 *)((long)puVar4 + 0x7584) = extraout_XMM0_Dd_x01456;
  puVar4[-0x346] = 0x907254;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xebe];
  *puVar1 = extraout_XMM0_Da_x01457;
  puVar1[1] = extraout_XMM0_Db_x01457;
  puVar1[2] = extraout_XMM0_Dc_x01457;
  puVar1[3] = extraout_XMM0_Dd_x01457;
  puVar4[-0x346] = 0x907274;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xeb6];
  *puVar1 = extraout_XMM0_Da_x01458;
  puVar1[1] = extraout_XMM0_Db_x01458;
  puVar1[2] = extraout_XMM0_Dc_x01458;
  puVar1[3] = extraout_XMM0_Dd_x01458;
  puVar4[0xb6f] = puVar4[0x1dfd];
  puVar4[0xb70] = puVar4[0x1dfe];
  puVar4[0xb71] = puVar4[0x1dfb];
  puVar4[0xb72] = puVar4[0x1dfc];
  puVar4[0xb73] = puVar4[0x1df9];
  puVar4[0xb74] = puVar4[0x1dfa];
  puVar4[0xb75] = puVar4[0x1df5];
  puVar4[0xb76] = puVar4[0x1df6];
  puVar4[0xb77] = puVar4[0x1df3];
  puVar4[0xb78] = puVar4[0x1df4];
  puVar4[0xb79] = puVar4[0x1df1];
  puVar4[0xb7a] = puVar4[0x1df2];
  puVar4[-0x346] = 0x9072eb;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xb6d) = extraout_XMM0_Da_x01459;
  *(undefined4 *)((long)puVar4 + 0x5b6c) = extraout_XMM0_Db_x01459;
  *(undefined4 *)(puVar4 + 0xb6e) = extraout_XMM0_Dc_x01459;
  *(undefined4 *)((long)puVar4 + 0x5b74) = extraout_XMM0_Dd_x01459;
  puVar4[-0x346] = 0x907300;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xb6b) = extraout_XMM0_Da_x01460;
  *(undefined4 *)((long)puVar4 + 0x5b5c) = extraout_XMM0_Db_x01460;
  *(undefined4 *)(puVar4 + 0xb6c) = extraout_XMM0_Dc_x01460;
  *(undefined4 *)((long)puVar4 + 0x5b64) = extraout_XMM0_Dd_x01460;
  puVar4[0xb69] = puVar4[0x1ddb];
  puVar4[0xb6a] = puVar4[0x1ddc];
  puVar4[-0x346] = 0x907325;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x907345;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x907355;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xead] = puVar4[0xb6f];
  puVar4[0xeae] = puVar4[0xb70];
  puVar4[0xeab] = puVar4[0xb71];
  puVar4[0xeac] = puVar4[0xb72];
  puVar4[0xea9] = puVar4[0xb73];
  puVar4[0xeaa] = puVar4[0xb74];
  puVar4[0xea8] = puVar4[0xcb6];
  puVar4[0xea5] = puVar4[0xb75];
  puVar4[0xea6] = puVar4[0xb76];
  puVar4[0xea3] = puVar4[0xb77];
  puVar4[0xea4] = puVar4[0xb78];
  puVar4[0xea1] = puVar4[0xb79];
  puVar4[0xea2] = puVar4[0xb7a];
  puVar4[0xea0] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0xe9d) = extraout_XMM0_Da_x01461;
  *(undefined4 *)((long)puVar4 + 0x74ec) = extraout_XMM0_Db_x01461;
  *(undefined4 *)(puVar4 + 0xe9e) = extraout_XMM0_Dc_x01461;
  *(undefined4 *)((long)puVar4 + 0x74f4) = extraout_XMM0_Dd_x01461;
  uVar2 = ((undefined8 *)puVar4[0xea0])[1];
  puVar4[0xb7d] = *(undefined8 *)puVar4[0xea0];
  puVar4[0xb7e] = uVar2;
  puVar4[-0x346] = 0x9073fd;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xb7b) = extraout_XMM0_Da_x01462;
  *(undefined4 *)((long)puVar4 + 0x5bdc) = extraout_XMM0_Db_x01462;
  *(undefined4 *)(puVar4 + 0xb7c) = extraout_XMM0_Dc_x01462;
  *(undefined4 *)((long)puVar4 + 0x5be4) = extraout_XMM0_Dd_x01462;
  puVar4[-0x346] = 0x907422;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x907442;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xe9b) = extraout_XMM0_Da_x01463;
  *(undefined4 *)((long)puVar4 + 0x74dc) = extraout_XMM0_Db_x01463;
  *(undefined4 *)(puVar4 + 0xe9c) = extraout_XMM0_Dc_x01463;
  *(undefined4 *)((long)puVar4 + 0x74e4) = extraout_XMM0_Dd_x01463;
  puVar4[-0x346] = 0x907457;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xb7f) = extraout_XMM0_Da_x01464;
  *(undefined4 *)((long)puVar4 + 0x5bfc) = extraout_XMM0_Db_x01464;
  *(undefined4 *)(puVar4 + 0xb80) = extraout_XMM0_Dc_x01464;
  *(undefined4 *)((long)puVar4 + 0x5c04) = extraout_XMM0_Dd_x01464;
  puVar4[-0x346] = 0x90747c;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90748c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xe99) = extraout_XMM0_Da_x01465;
  *(undefined4 *)((long)puVar4 + 0x74cc) = extraout_XMM0_Db_x01465;
  *(undefined4 *)(puVar4 + 0xe9a) = extraout_XMM0_Dc_x01465;
  *(undefined4 *)((long)puVar4 + 0x74d4) = extraout_XMM0_Dd_x01465;
  puVar4[-0x346] = 0x9074ac;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xea8];
  *puVar1 = extraout_XMM0_Da_x01466;
  puVar1[1] = extraout_XMM0_Db_x01466;
  puVar1[2] = extraout_XMM0_Dc_x01466;
  puVar1[3] = extraout_XMM0_Dd_x01466;
  puVar4[-0x346] = 0x9074cc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xea0];
  *puVar1 = extraout_XMM0_Da_x01467;
  puVar1[1] = extraout_XMM0_Db_x01467;
  puVar1[2] = extraout_XMM0_Dc_x01467;
  puVar1[3] = extraout_XMM0_Dd_x01467;
  puVar4[0xb89] = puVar4[0x1def];
  puVar4[0xb8a] = puVar4[0x1df0];
  puVar4[0xb8b] = puVar4[0x1dfd];
  puVar4[0xb8c] = puVar4[0x1dfe];
  puVar4[0xb8d] = puVar4[0x1dfb];
  puVar4[0xb8e] = puVar4[0x1dfc];
  puVar4[0xb8f] = puVar4[0x1df7];
  puVar4[0xb90] = puVar4[0x1df8];
  puVar4[0xb91] = puVar4[0x1df5];
  puVar4[0xb92] = puVar4[0x1df6];
  puVar4[0xb93] = puVar4[0x1df3];
  puVar4[0xb94] = puVar4[0x1df4];
  puVar4[-0x346] = 0x907543;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xb87) = extraout_XMM0_Da_x01468;
  *(undefined4 *)((long)puVar4 + 0x5c3c) = extraout_XMM0_Db_x01468;
  *(undefined4 *)(puVar4 + 0xb88) = extraout_XMM0_Dc_x01468;
  *(undefined4 *)((long)puVar4 + 0x5c44) = extraout_XMM0_Dd_x01468;
  puVar4[-0x346] = 0x907558;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xb85) = extraout_XMM0_Da_x01469;
  *(undefined4 *)((long)puVar4 + 0x5c2c) = extraout_XMM0_Db_x01469;
  *(undefined4 *)(puVar4 + 0xb86) = extraout_XMM0_Dc_x01469;
  *(undefined4 *)((long)puVar4 + 0x5c34) = extraout_XMM0_Dd_x01469;
  puVar4[0xb83] = puVar4[0x1dd9];
  puVar4[0xb84] = puVar4[0x1dda];
  puVar4[-0x346] = 0x90757d;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x90759d;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x9075ad;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xe97] = puVar4[0xb89];
  puVar4[0xe98] = puVar4[0xb8a];
  puVar4[0xe95] = puVar4[0xb8b];
  puVar4[0xe96] = puVar4[0xb8c];
  puVar4[0xe93] = puVar4[0xb8d];
  puVar4[0xe94] = puVar4[0xb8e];
  puVar4[0xe92] = puVar4[0xcd4];
  puVar4[0xe8f] = puVar4[0xb8f];
  puVar4[0xe90] = puVar4[0xb90];
  puVar4[0xe8d] = puVar4[0xb91];
  puVar4[0xe8e] = puVar4[0xb92];
  puVar4[0xe8b] = puVar4[0xb93];
  puVar4[0xe8c] = puVar4[0xb94];
  puVar4[0xe8a] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0xe87) = extraout_XMM0_Da_x01470;
  *(undefined4 *)((long)puVar4 + 0x743c) = extraout_XMM0_Db_x01470;
  *(undefined4 *)(puVar4 + 0xe88) = extraout_XMM0_Dc_x01470;
  *(undefined4 *)((long)puVar4 + 0x7444) = extraout_XMM0_Dd_x01470;
  uVar2 = ((undefined8 *)puVar4[0xe8a])[1];
  puVar4[0xb97] = *(undefined8 *)puVar4[0xe8a];
  puVar4[0xb98] = uVar2;
  puVar4[-0x346] = 0x907655;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xb95) = extraout_XMM0_Da_x01471;
  *(undefined4 *)((long)puVar4 + 0x5cac) = extraout_XMM0_Db_x01471;
  *(undefined4 *)(puVar4 + 0xb96) = extraout_XMM0_Dc_x01471;
  *(undefined4 *)((long)puVar4 + 0x5cb4) = extraout_XMM0_Dd_x01471;
  puVar4[-0x346] = 0x90767a;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90769a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xe85) = extraout_XMM0_Da_x01472;
  *(undefined4 *)((long)puVar4 + 0x742c) = extraout_XMM0_Db_x01472;
  *(undefined4 *)(puVar4 + 0xe86) = extraout_XMM0_Dc_x01472;
  *(undefined4 *)((long)puVar4 + 0x7434) = extraout_XMM0_Dd_x01472;
  puVar4[-0x346] = 0x9076af;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xb99) = extraout_XMM0_Da_x01473;
  *(undefined4 *)((long)puVar4 + 0x5ccc) = extraout_XMM0_Db_x01473;
  *(undefined4 *)(puVar4 + 0xb9a) = extraout_XMM0_Dc_x01473;
  *(undefined4 *)((long)puVar4 + 0x5cd4) = extraout_XMM0_Dd_x01473;
  puVar4[-0x346] = 0x9076d4;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9076e4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xe83) = extraout_XMM0_Da_x01474;
  *(undefined4 *)((long)puVar4 + 0x741c) = extraout_XMM0_Db_x01474;
  *(undefined4 *)(puVar4 + 0xe84) = extraout_XMM0_Dc_x01474;
  *(undefined4 *)((long)puVar4 + 0x7424) = extraout_XMM0_Dd_x01474;
  puVar4[-0x346] = 0x907704;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xe92];
  *puVar1 = extraout_XMM0_Da_x01475;
  puVar1[1] = extraout_XMM0_Db_x01475;
  puVar1[2] = extraout_XMM0_Dc_x01475;
  puVar1[3] = extraout_XMM0_Dd_x01475;
  puVar4[-0x346] = 0x907724;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xe8a];
  *puVar1 = extraout_XMM0_Da_x01476;
  puVar1[1] = extraout_XMM0_Db_x01476;
  puVar1[2] = extraout_XMM0_Dc_x01476;
  puVar1[3] = extraout_XMM0_Dd_x01476;
  puVar4[0xba3] = puVar4[0x1df1];
  puVar4[0xba4] = puVar4[0x1df2];
  puVar4[0xba5] = puVar4[0x1def];
  puVar4[0xba6] = puVar4[0x1df0];
  puVar4[0xba7] = puVar4[0x1dfd];
  puVar4[0xba8] = puVar4[0x1dfe];
  puVar4[0xba9] = puVar4[0x1df9];
  puVar4[0xbaa] = puVar4[0x1dfa];
  puVar4[0xbab] = puVar4[0x1df7];
  puVar4[0xbac] = puVar4[0x1df8];
  puVar4[0xbad] = puVar4[0x1df5];
  puVar4[0xbae] = puVar4[0x1df6];
  puVar4[-0x346] = 0x90779b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xba1) = extraout_XMM0_Da_x01477;
  *(undefined4 *)((long)puVar4 + 0x5d0c) = extraout_XMM0_Db_x01477;
  *(undefined4 *)(puVar4 + 0xba2) = extraout_XMM0_Dc_x01477;
  *(undefined4 *)((long)puVar4 + 0x5d14) = extraout_XMM0_Dd_x01477;
  puVar4[-0x346] = 0x9077b0;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xb9f) = extraout_XMM0_Da_x01478;
  *(undefined4 *)((long)puVar4 + 0x5cfc) = extraout_XMM0_Db_x01478;
  *(undefined4 *)(puVar4 + 0xba0) = extraout_XMM0_Dc_x01478;
  *(undefined4 *)((long)puVar4 + 0x5d04) = extraout_XMM0_Dd_x01478;
  puVar4[0xb9d] = puVar4[0x1dd7];
  puVar4[0xb9e] = puVar4[0x1dd8];
  puVar4[-0x346] = 0x9077d5;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x9077f5;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x907805;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xe81] = puVar4[0xba3];
  puVar4[0xe82] = puVar4[0xba4];
  puVar4[0xe7f] = puVar4[0xba5];
  puVar4[0xe80] = puVar4[0xba6];
  puVar4[0xe7d] = puVar4[0xba7];
  puVar4[0xe7e] = puVar4[0xba8];
  puVar4[0xe7c] = puVar4[0xcf4];
  puVar4[0xe79] = puVar4[0xba9];
  puVar4[0xe7a] = puVar4[0xbaa];
  puVar4[0xe77] = puVar4[0xbab];
  puVar4[0xe78] = puVar4[0xbac];
  puVar4[0xe75] = puVar4[0xbad];
  puVar4[0xe76] = puVar4[0xbae];
  puVar4[0xe74] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0xe71) = extraout_XMM0_Da_x01479;
  *(undefined4 *)((long)puVar4 + 0x738c) = extraout_XMM0_Db_x01479;
  *(undefined4 *)(puVar4 + 0xe72) = extraout_XMM0_Dc_x01479;
  *(undefined4 *)((long)puVar4 + 0x7394) = extraout_XMM0_Dd_x01479;
  uVar2 = ((undefined8 *)puVar4[0xe74])[1];
  puVar4[0xbb1] = *(undefined8 *)puVar4[0xe74];
  puVar4[0xbb2] = uVar2;
  puVar4[-0x346] = 0x9078ad;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xbaf) = extraout_XMM0_Da_x01480;
  *(undefined4 *)((long)puVar4 + 0x5d7c) = extraout_XMM0_Db_x01480;
  *(undefined4 *)(puVar4 + 0xbb0) = extraout_XMM0_Dc_x01480;
  *(undefined4 *)((long)puVar4 + 0x5d84) = extraout_XMM0_Dd_x01480;
  puVar4[-0x346] = 0x9078d2;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9078f2;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xe6f) = extraout_XMM0_Da_x01481;
  *(undefined4 *)((long)puVar4 + 0x737c) = extraout_XMM0_Db_x01481;
  *(undefined4 *)(puVar4 + 0xe70) = extraout_XMM0_Dc_x01481;
  *(undefined4 *)((long)puVar4 + 0x7384) = extraout_XMM0_Dd_x01481;
  puVar4[-0x346] = 0x907907;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xbb3) = extraout_XMM0_Da_x01482;
  *(undefined4 *)((long)puVar4 + 0x5d9c) = extraout_XMM0_Db_x01482;
  *(undefined4 *)(puVar4 + 0xbb4) = extraout_XMM0_Dc_x01482;
  *(undefined4 *)((long)puVar4 + 0x5da4) = extraout_XMM0_Dd_x01482;
  puVar4[-0x346] = 0x90792c;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90793c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xe6d) = extraout_XMM0_Da_x01483;
  *(undefined4 *)((long)puVar4 + 0x736c) = extraout_XMM0_Db_x01483;
  *(undefined4 *)(puVar4 + 0xe6e) = extraout_XMM0_Dc_x01483;
  *(undefined4 *)((long)puVar4 + 0x7374) = extraout_XMM0_Dd_x01483;
  puVar4[-0x346] = 0x90795c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xe7c];
  *puVar1 = extraout_XMM0_Da_x01484;
  puVar1[1] = extraout_XMM0_Db_x01484;
  puVar1[2] = extraout_XMM0_Dc_x01484;
  puVar1[3] = extraout_XMM0_Dd_x01484;
  puVar4[-0x346] = 0x90797c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xe74];
  *puVar1 = extraout_XMM0_Da_x01485;
  puVar1[1] = extraout_XMM0_Db_x01485;
  puVar1[2] = extraout_XMM0_Dc_x01485;
  puVar1[3] = extraout_XMM0_Dd_x01485;
  puVar4[0xbbd] = puVar4[0x1df3];
  puVar4[0xbbe] = puVar4[0x1df4];
  puVar4[0xbbf] = puVar4[0x1df1];
  puVar4[0xbc0] = puVar4[0x1df2];
  puVar4[0xbc1] = puVar4[0x1def];
  puVar4[0xbc2] = puVar4[0x1df0];
  puVar4[0xbc3] = puVar4[0x1dfb];
  puVar4[0xbc4] = puVar4[0x1dfc];
  puVar4[0xbc5] = puVar4[0x1df9];
  puVar4[0xbc6] = puVar4[0x1dfa];
  puVar4[0xbc7] = puVar4[0x1df7];
  puVar4[0xbc8] = puVar4[0x1df8];
  puVar4[-0x346] = 0x9079f3;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xbbb) = extraout_XMM0_Da_x01486;
  *(undefined4 *)((long)puVar4 + 0x5ddc) = extraout_XMM0_Db_x01486;
  *(undefined4 *)(puVar4 + 0xbbc) = extraout_XMM0_Dc_x01486;
  *(undefined4 *)((long)puVar4 + 0x5de4) = extraout_XMM0_Dd_x01486;
  puVar4[-0x346] = 0x907a08;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xbb9) = extraout_XMM0_Da_x01487;
  *(undefined4 *)((long)puVar4 + 0x5dcc) = extraout_XMM0_Db_x01487;
  *(undefined4 *)(puVar4 + 0xbba) = extraout_XMM0_Dc_x01487;
  *(undefined4 *)((long)puVar4 + 0x5dd4) = extraout_XMM0_Dd_x01487;
  puVar4[2999] = puVar4[0x1dd5];
  puVar4[3000] = puVar4[0x1dd6];
  puVar4[-0x346] = 0x907a2d;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x907a4d;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x907a5d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xe6b] = puVar4[0xbbd];
  puVar4[0xe6c] = puVar4[0xbbe];
  puVar4[0xe69] = puVar4[0xbbf];
  puVar4[0xe6a] = puVar4[0xbc0];
  puVar4[0xe67] = puVar4[0xbc1];
  puVar4[0xe68] = puVar4[0xbc2];
  puVar4[0xe66] = puVar4[0xd14];
  puVar4[0xe63] = puVar4[0xbc3];
  puVar4[0xe64] = puVar4[0xbc4];
  puVar4[0xe61] = puVar4[0xbc5];
  puVar4[0xe62] = puVar4[0xbc6];
  puVar4[0xe5f] = puVar4[0xbc7];
  puVar4[0xe60] = puVar4[0xbc8];
  puVar4[0xe5e] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0xe5b) = extraout_XMM0_Da_x01488;
  *(undefined4 *)((long)puVar4 + 0x72dc) = extraout_XMM0_Db_x01488;
  *(undefined4 *)(puVar4 + 0xe5c) = extraout_XMM0_Dc_x01488;
  *(undefined4 *)((long)puVar4 + 0x72e4) = extraout_XMM0_Dd_x01488;
  uVar2 = ((undefined8 *)puVar4[0xe5e])[1];
  puVar4[0xbcb] = *(undefined8 *)puVar4[0xe5e];
  puVar4[0xbcc] = uVar2;
  puVar4[-0x346] = 0x907b05;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xbc9) = extraout_XMM0_Da_x01489;
  *(undefined4 *)((long)puVar4 + 0x5e4c) = extraout_XMM0_Db_x01489;
  *(undefined4 *)(puVar4 + 0xbca) = extraout_XMM0_Dc_x01489;
  *(undefined4 *)((long)puVar4 + 0x5e54) = extraout_XMM0_Dd_x01489;
  puVar4[-0x346] = 0x907b2a;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x907b4a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xe59) = extraout_XMM0_Da_x01490;
  *(undefined4 *)((long)puVar4 + 0x72cc) = extraout_XMM0_Db_x01490;
  *(undefined4 *)(puVar4 + 0xe5a) = extraout_XMM0_Dc_x01490;
  *(undefined4 *)((long)puVar4 + 0x72d4) = extraout_XMM0_Dd_x01490;
  puVar4[-0x346] = 0x907b5f;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xbcd) = extraout_XMM0_Da_x01491;
  *(undefined4 *)((long)puVar4 + 0x5e6c) = extraout_XMM0_Db_x01491;
  *(undefined4 *)(puVar4 + 0xbce) = extraout_XMM0_Dc_x01491;
  *(undefined4 *)((long)puVar4 + 0x5e74) = extraout_XMM0_Dd_x01491;
  puVar4[-0x346] = 0x907b84;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x907b94;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xe57) = extraout_XMM0_Da_x01492;
  *(undefined4 *)((long)puVar4 + 0x72bc) = extraout_XMM0_Db_x01492;
  *(undefined4 *)(puVar4 + 0xe58) = extraout_XMM0_Dc_x01492;
  *(undefined4 *)((long)puVar4 + 0x72c4) = extraout_XMM0_Dd_x01492;
  puVar4[-0x346] = 0x907bb4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xe66];
  *puVar1 = extraout_XMM0_Da_x01493;
  puVar1[1] = extraout_XMM0_Db_x01493;
  puVar1[2] = extraout_XMM0_Dc_x01493;
  puVar1[3] = extraout_XMM0_Dd_x01493;
  puVar4[-0x346] = 0x907bd4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xe5e];
  *puVar1 = extraout_XMM0_Da_x01494;
  puVar1[1] = extraout_XMM0_Db_x01494;
  puVar1[2] = extraout_XMM0_Dc_x01494;
  puVar1[3] = extraout_XMM0_Dd_x01494;
  puVar4[0xbd7] = puVar4[0x1df5];
  puVar4[0xbd8] = puVar4[0x1df6];
  puVar4[0xbd9] = puVar4[0x1df3];
  puVar4[0xbda] = puVar4[0x1df4];
  puVar4[0xbdb] = puVar4[0x1df1];
  puVar4[0xbdc] = puVar4[0x1df2];
  puVar4[0xbdd] = puVar4[0x1dfd];
  puVar4[0xbde] = puVar4[0x1dfe];
  puVar4[0xbdf] = puVar4[0x1dfb];
  puVar4[0xbe0] = puVar4[0x1dfc];
  puVar4[0xbe1] = puVar4[0x1df9];
  puVar4[0xbe2] = puVar4[0x1dfa];
  puVar4[-0x346] = 0x907c4b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xbd5) = extraout_XMM0_Da_x01495;
  *(undefined4 *)((long)puVar4 + 0x5eac) = extraout_XMM0_Db_x01495;
  *(undefined4 *)(puVar4 + 0xbd6) = extraout_XMM0_Dc_x01495;
  *(undefined4 *)((long)puVar4 + 0x5eb4) = extraout_XMM0_Dd_x01495;
  puVar4[-0x346] = 0x907c60;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xbd3) = extraout_XMM0_Da_x01496;
  *(undefined4 *)((long)puVar4 + 0x5e9c) = extraout_XMM0_Db_x01496;
  *(undefined4 *)(puVar4 + 0xbd4) = extraout_XMM0_Dc_x01496;
  *(undefined4 *)((long)puVar4 + 0x5ea4) = extraout_XMM0_Dd_x01496;
  puVar4[0xbd1] = puVar4[0x1dd3];
  puVar4[0xbd2] = puVar4[0x1dd4];
  puVar4[-0x346] = 0x907c85;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x907ca5;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x907cb5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xe55] = puVar4[0xbd7];
  puVar4[0xe56] = puVar4[0xbd8];
  puVar4[0xe53] = puVar4[0xbd9];
  puVar4[0xe54] = puVar4[0xbda];
  puVar4[0xe51] = puVar4[0xbdb];
  puVar4[0xe52] = puVar4[0xbdc];
  puVar4[0xe50] = puVar4[0xcae];
  puVar4[0xe4d] = puVar4[0xbdd];
  puVar4[0xe4e] = puVar4[0xbde];
  puVar4[0xe4b] = puVar4[0xbdf];
  puVar4[0xe4c] = puVar4[0xbe0];
  puVar4[0xe49] = puVar4[0xbe1];
  puVar4[0xe4a] = puVar4[0xbe2];
  puVar4[0xe48] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0xe45) = extraout_XMM0_Da_x01497;
  *(undefined4 *)((long)puVar4 + 0x722c) = extraout_XMM0_Db_x01497;
  *(undefined4 *)(puVar4 + 0xe46) = extraout_XMM0_Dc_x01497;
  *(undefined4 *)((long)puVar4 + 0x7234) = extraout_XMM0_Dd_x01497;
  uVar2 = ((undefined8 *)puVar4[0xe48])[1];
  puVar4[0xbe5] = *(undefined8 *)puVar4[0xe48];
  puVar4[0xbe6] = uVar2;
  puVar4[-0x346] = 0x907d5d;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xbe3) = extraout_XMM0_Da_x01498;
  *(undefined4 *)((long)puVar4 + 0x5f1c) = extraout_XMM0_Db_x01498;
  *(undefined4 *)(puVar4 + 0xbe4) = extraout_XMM0_Dc_x01498;
  *(undefined4 *)((long)puVar4 + 0x5f24) = extraout_XMM0_Dd_x01498;
  puVar4[-0x346] = 0x907d82;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x907da2;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xe43) = extraout_XMM0_Da_x01499;
  *(undefined4 *)((long)puVar4 + 0x721c) = extraout_XMM0_Db_x01499;
  *(undefined4 *)(puVar4 + 0xe44) = extraout_XMM0_Dc_x01499;
  *(undefined4 *)((long)puVar4 + 0x7224) = extraout_XMM0_Dd_x01499;
  puVar4[-0x346] = 0x907db7;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xbe7) = extraout_XMM0_Da_x01500;
  *(undefined4 *)((long)puVar4 + 0x5f3c) = extraout_XMM0_Db_x01500;
  *(undefined4 *)(puVar4 + 0xbe8) = extraout_XMM0_Dc_x01500;
  *(undefined4 *)((long)puVar4 + 0x5f44) = extraout_XMM0_Dd_x01500;
  puVar4[-0x346] = 0x907ddc;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x907dec;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xe41) = extraout_XMM0_Da_x01501;
  *(undefined4 *)((long)puVar4 + 0x720c) = extraout_XMM0_Db_x01501;
  *(undefined4 *)(puVar4 + 0xe42) = extraout_XMM0_Dc_x01501;
  *(undefined4 *)((long)puVar4 + 0x7214) = extraout_XMM0_Dd_x01501;
  puVar4[-0x346] = 0x907e0c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xe50];
  *puVar1 = extraout_XMM0_Da_x01502;
  puVar1[1] = extraout_XMM0_Db_x01502;
  puVar1[2] = extraout_XMM0_Dc_x01502;
  puVar1[3] = extraout_XMM0_Dd_x01502;
  puVar4[-0x346] = 0x907e2c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xe48];
  *puVar1 = extraout_XMM0_Da_x01503;
  puVar1[1] = extraout_XMM0_Db_x01503;
  puVar1[2] = extraout_XMM0_Dc_x01503;
  puVar1[3] = extraout_XMM0_Dd_x01503;
  puVar4[0xbf1] = puVar4[0x1df7];
  puVar4[0xbf2] = puVar4[0x1df8];
  puVar4[0xbf3] = puVar4[0x1df5];
  puVar4[0xbf4] = puVar4[0x1df6];
  puVar4[0xbf5] = puVar4[0x1df3];
  puVar4[0xbf6] = puVar4[0x1df4];
  puVar4[0xbf7] = puVar4[0x1def];
  puVar4[0xbf8] = puVar4[0x1df0];
  puVar4[0xbf9] = puVar4[0x1dfd];
  puVar4[0xbfa] = puVar4[0x1dfe];
  puVar4[0xbfb] = puVar4[0x1dfb];
  puVar4[0xbfc] = puVar4[0x1dfc];
  puVar4[-0x346] = 0x907ea3;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xbef) = extraout_XMM0_Da_x01504;
  *(undefined4 *)((long)puVar4 + 0x5f7c) = extraout_XMM0_Db_x01504;
  *(undefined4 *)(puVar4 + 0xbf0) = extraout_XMM0_Dc_x01504;
  *(undefined4 *)((long)puVar4 + 0x5f84) = extraout_XMM0_Dd_x01504;
  puVar4[-0x346] = 0x907eb8;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xbed) = extraout_XMM0_Da_x01505;
  *(undefined4 *)((long)puVar4 + 0x5f6c) = extraout_XMM0_Db_x01505;
  *(undefined4 *)(puVar4 + 0xbee) = extraout_XMM0_Dc_x01505;
  *(undefined4 *)((long)puVar4 + 0x5f74) = extraout_XMM0_Dd_x01505;
  puVar4[0xbeb] = puVar4[0x1dd1];
  puVar4[0xbec] = puVar4[0x1dd2];
  puVar4[-0x346] = 0x907edd;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x907efd;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x907f0d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xe3f] = puVar4[0xbf1];
  puVar4[0xe40] = puVar4[0xbf2];
  puVar4[0xe3d] = puVar4[0xbf3];
  puVar4[0xe3e] = puVar4[0xbf4];
  puVar4[0xe3b] = puVar4[0xbf5];
  puVar4[0xe3c] = puVar4[0xbf6];
  puVar4[0xe3a] = puVar4[0xccc];
  puVar4[0xe37] = puVar4[0xbf7];
  puVar4[0xe38] = puVar4[0xbf8];
  puVar4[0xe35] = puVar4[0xbf9];
  puVar4[0xe36] = puVar4[0xbfa];
  puVar4[0xe33] = puVar4[0xbfb];
  puVar4[0xe34] = puVar4[0xbfc];
  puVar4[0xe32] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0xe2f) = extraout_XMM0_Da_x01506;
  *(undefined4 *)((long)puVar4 + 0x717c) = extraout_XMM0_Db_x01506;
  *(undefined4 *)(puVar4 + 0xe30) = extraout_XMM0_Dc_x01506;
  *(undefined4 *)((long)puVar4 + 0x7184) = extraout_XMM0_Dd_x01506;
  uVar2 = ((undefined8 *)puVar4[0xe32])[1];
  puVar4[0xbff] = *(undefined8 *)puVar4[0xe32];
  puVar4[0xc00] = uVar2;
  puVar4[-0x346] = 0x907fb5;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xbfd) = extraout_XMM0_Da_x01507;
  *(undefined4 *)((long)puVar4 + 0x5fec) = extraout_XMM0_Db_x01507;
  *(undefined4 *)(puVar4 + 0xbfe) = extraout_XMM0_Dc_x01507;
  *(undefined4 *)((long)puVar4 + 0x5ff4) = extraout_XMM0_Dd_x01507;
  puVar4[-0x346] = 0x907fda;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x907ffa;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xe2d) = extraout_XMM0_Da_x01508;
  *(undefined4 *)((long)puVar4 + 0x716c) = extraout_XMM0_Db_x01508;
  *(undefined4 *)(puVar4 + 0xe2e) = extraout_XMM0_Dc_x01508;
  *(undefined4 *)((long)puVar4 + 0x7174) = extraout_XMM0_Dd_x01508;
  puVar4[-0x346] = 0x90800f;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xc01) = extraout_XMM0_Da_x01509;
  *(undefined4 *)((long)puVar4 + 0x600c) = extraout_XMM0_Db_x01509;
  *(undefined4 *)(puVar4 + 0xc02) = extraout_XMM0_Dc_x01509;
  *(undefined4 *)((long)puVar4 + 0x6014) = extraout_XMM0_Dd_x01509;
  puVar4[-0x346] = 0x908034;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x908044;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xe2b) = extraout_XMM0_Da_x01510;
  *(undefined4 *)((long)puVar4 + 0x715c) = extraout_XMM0_Db_x01510;
  *(undefined4 *)(puVar4 + 0xe2c) = extraout_XMM0_Dc_x01510;
  *(undefined4 *)((long)puVar4 + 0x7164) = extraout_XMM0_Dd_x01510;
  puVar4[-0x346] = 0x908064;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xe3a];
  *puVar1 = extraout_XMM0_Da_x01511;
  puVar1[1] = extraout_XMM0_Db_x01511;
  puVar1[2] = extraout_XMM0_Dc_x01511;
  puVar1[3] = extraout_XMM0_Dd_x01511;
  puVar4[-0x346] = 0x908084;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xe32];
  *puVar1 = extraout_XMM0_Da_x01512;
  puVar1[1] = extraout_XMM0_Db_x01512;
  puVar1[2] = extraout_XMM0_Dc_x01512;
  puVar1[3] = extraout_XMM0_Dd_x01512;
  puVar4[0xc0b] = puVar4[0x1df9];
  puVar4[0xc0c] = puVar4[0x1dfa];
  puVar4[0xc0d] = puVar4[0x1df7];
  puVar4[0xc0e] = puVar4[0x1df8];
  puVar4[0xc0f] = puVar4[0x1df5];
  puVar4[0xc10] = puVar4[0x1df6];
  puVar4[0xc11] = puVar4[0x1df1];
  puVar4[0xc12] = puVar4[0x1df2];
  puVar4[0xc13] = puVar4[0x1def];
  puVar4[0xc14] = puVar4[0x1df0];
  puVar4[0xc15] = puVar4[0x1dfd];
  puVar4[0xc16] = puVar4[0x1dfe];
  puVar4[-0x346] = 0x9080fb;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xc09) = extraout_XMM0_Da_x01513;
  *(undefined4 *)((long)puVar4 + 0x604c) = extraout_XMM0_Db_x01513;
  *(undefined4 *)(puVar4 + 0xc0a) = extraout_XMM0_Dc_x01513;
  *(undefined4 *)((long)puVar4 + 0x6054) = extraout_XMM0_Dd_x01513;
  puVar4[-0x346] = 0x908110;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xc07) = extraout_XMM0_Da_x01514;
  *(undefined4 *)((long)puVar4 + 0x603c) = extraout_XMM0_Db_x01514;
  *(undefined4 *)(puVar4 + 0xc08) = extraout_XMM0_Dc_x01514;
  *(undefined4 *)((long)puVar4 + 0x6044) = extraout_XMM0_Dd_x01514;
  puVar4[0xc05] = puVar4[0x1dcf];
  puVar4[0xc06] = puVar4[0x1dd0];
  puVar4[-0x346] = 0x908135;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x908155;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x908165;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xe29] = puVar4[0xc0b];
  puVar4[0xe2a] = puVar4[0xc0c];
  puVar4[0xe27] = puVar4[0xc0d];
  puVar4[0xe28] = puVar4[0xc0e];
  puVar4[0xe25] = puVar4[0xc0f];
  puVar4[0xe26] = puVar4[0xc10];
  puVar4[0xe24] = puVar4[0xcec];
  puVar4[0xe21] = puVar4[0xc11];
  puVar4[0xe22] = puVar4[0xc12];
  puVar4[0xe1f] = puVar4[0xc13];
  puVar4[0xe20] = puVar4[0xc14];
  puVar4[0xe1d] = puVar4[0xc15];
  puVar4[0xe1e] = puVar4[0xc16];
  puVar4[0xe1c] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0xe19) = extraout_XMM0_Da_x01515;
  *(undefined4 *)((long)puVar4 + 0x70cc) = extraout_XMM0_Db_x01515;
  *(undefined4 *)(puVar4 + 0xe1a) = extraout_XMM0_Dc_x01515;
  *(undefined4 *)((long)puVar4 + 0x70d4) = extraout_XMM0_Dd_x01515;
  uVar2 = ((undefined8 *)puVar4[0xe1c])[1];
  puVar4[0xc19] = *(undefined8 *)puVar4[0xe1c];
  puVar4[0xc1a] = uVar2;
  puVar4[-0x346] = 0x90820d;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xc17) = extraout_XMM0_Da_x01516;
  *(undefined4 *)((long)puVar4 + 0x60bc) = extraout_XMM0_Db_x01516;
  *(undefined4 *)(puVar4 + 0xc18) = extraout_XMM0_Dc_x01516;
  *(undefined4 *)((long)puVar4 + 0x60c4) = extraout_XMM0_Dd_x01516;
  puVar4[-0x346] = 0x908232;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x908252;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xe17) = extraout_XMM0_Da_x01517;
  *(undefined4 *)((long)puVar4 + 0x70bc) = extraout_XMM0_Db_x01517;
  *(undefined4 *)(puVar4 + 0xe18) = extraout_XMM0_Dc_x01517;
  *(undefined4 *)((long)puVar4 + 0x70c4) = extraout_XMM0_Dd_x01517;
  puVar4[-0x346] = 0x908267;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xc1b) = extraout_XMM0_Da_x01518;
  *(undefined4 *)((long)puVar4 + 0x60dc) = extraout_XMM0_Db_x01518;
  *(undefined4 *)(puVar4 + 0xc1c) = extraout_XMM0_Dc_x01518;
  *(undefined4 *)((long)puVar4 + 0x60e4) = extraout_XMM0_Dd_x01518;
  puVar4[-0x346] = 0x90828c;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90829c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xe15) = extraout_XMM0_Da_x01519;
  *(undefined4 *)((long)puVar4 + 0x70ac) = extraout_XMM0_Db_x01519;
  *(undefined4 *)(puVar4 + 0xe16) = extraout_XMM0_Dc_x01519;
  *(undefined4 *)((long)puVar4 + 0x70b4) = extraout_XMM0_Dd_x01519;
  puVar4[-0x346] = 0x9082bc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xe24];
  *puVar1 = extraout_XMM0_Da_x01520;
  puVar1[1] = extraout_XMM0_Db_x01520;
  puVar1[2] = extraout_XMM0_Dc_x01520;
  puVar1[3] = extraout_XMM0_Dd_x01520;
  puVar4[-0x346] = 0x9082dc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xe1c];
  *puVar1 = extraout_XMM0_Da_x01521;
  puVar1[1] = extraout_XMM0_Db_x01521;
  puVar1[2] = extraout_XMM0_Dc_x01521;
  puVar1[3] = extraout_XMM0_Dd_x01521;
  puVar4[0xc25] = puVar4[0x1dfb];
  puVar4[0xc26] = puVar4[0x1dfc];
  puVar4[0xc27] = puVar4[0x1df9];
  puVar4[0xc28] = puVar4[0x1dfa];
  puVar4[0xc29] = puVar4[0x1df7];
  puVar4[0xc2a] = puVar4[0x1df8];
  puVar4[0xc2b] = puVar4[0x1df3];
  puVar4[0xc2c] = puVar4[0x1df4];
  puVar4[0xc2d] = puVar4[0x1df1];
  puVar4[0xc2e] = puVar4[0x1df2];
  puVar4[0xc2f] = puVar4[0x1def];
  puVar4[0xc30] = puVar4[0x1df0];
  puVar4[-0x346] = 0x908353;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xc23) = extraout_XMM0_Da_x01522;
  *(undefined4 *)((long)puVar4 + 0x611c) = extraout_XMM0_Db_x01522;
  *(undefined4 *)(puVar4 + 0xc24) = extraout_XMM0_Dc_x01522;
  *(undefined4 *)((long)puVar4 + 0x6124) = extraout_XMM0_Dd_x01522;
  puVar4[-0x346] = 0x908368;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xc21) = extraout_XMM0_Da_x01523;
  *(undefined4 *)((long)puVar4 + 0x610c) = extraout_XMM0_Db_x01523;
  *(undefined4 *)(puVar4 + 0xc22) = extraout_XMM0_Dc_x01523;
  *(undefined4 *)((long)puVar4 + 0x6114) = extraout_XMM0_Dd_x01523;
  puVar4[0xc1f] = puVar4[0x1ded];
  puVar4[0xc20] = puVar4[0x1dee];
  puVar4[-0x346] = 0x90838d;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x9083ad;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x9083bd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xe13] = puVar4[0xc25];
  puVar4[0xe14] = puVar4[0xc26];
  puVar4[0xe11] = puVar4[0xc27];
  puVar4[0xe12] = puVar4[0xc28];
  puVar4[0xe0f] = puVar4[0xc29];
  puVar4[0xe10] = puVar4[0xc2a];
  puVar4[0xe0e] = puVar4[0xd0c];
  puVar4[0xe0b] = puVar4[0xc2b];
  puVar4[0xe0c] = puVar4[0xc2c];
  puVar4[0xe09] = puVar4[0xc2d];
  puVar4[0xe0a] = puVar4[0xc2e];
  puVar4[0xe07] = puVar4[0xc2f];
  puVar4[0xe08] = puVar4[0xc30];
  puVar4[0xe06] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0xe03) = extraout_XMM0_Da_x01524;
  *(undefined4 *)((long)puVar4 + 0x701c) = extraout_XMM0_Db_x01524;
  *(undefined4 *)(puVar4 + 0xe04) = extraout_XMM0_Dc_x01524;
  *(undefined4 *)((long)puVar4 + 0x7024) = extraout_XMM0_Dd_x01524;
  uVar2 = ((undefined8 *)puVar4[0xe06])[1];
  puVar4[0xc33] = *(undefined8 *)puVar4[0xe06];
  puVar4[0xc34] = uVar2;
  puVar4[-0x346] = 0x908465;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xc31) = extraout_XMM0_Da_x01525;
  *(undefined4 *)((long)puVar4 + 0x618c) = extraout_XMM0_Db_x01525;
  *(undefined4 *)(puVar4 + 0xc32) = extraout_XMM0_Dc_x01525;
  *(undefined4 *)((long)puVar4 + 0x6194) = extraout_XMM0_Dd_x01525;
  puVar4[-0x346] = 0x90848a;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9084aa;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xe01) = extraout_XMM0_Da_x01526;
  *(undefined4 *)((long)puVar4 + 0x700c) = extraout_XMM0_Db_x01526;
  *(undefined4 *)(puVar4 + 0xe02) = extraout_XMM0_Dc_x01526;
  *(undefined4 *)((long)puVar4 + 0x7014) = extraout_XMM0_Dd_x01526;
  puVar4[-0x346] = 0x9084bf;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xc35) = extraout_XMM0_Da_x01527;
  *(undefined4 *)((long)puVar4 + 0x61ac) = extraout_XMM0_Db_x01527;
  *(undefined4 *)(puVar4 + 0xc36) = extraout_XMM0_Dc_x01527;
  *(undefined4 *)((long)puVar4 + 0x61b4) = extraout_XMM0_Dd_x01527;
  puVar4[-0x346] = 0x9084e4;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9084f4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xdff) = extraout_XMM0_Da_x01528;
  *(undefined4 *)((long)puVar4 + 0x6ffc) = extraout_XMM0_Db_x01528;
  *(undefined4 *)(puVar4 + 0xe00) = extraout_XMM0_Dc_x01528;
  *(undefined4 *)((long)puVar4 + 0x7004) = extraout_XMM0_Dd_x01528;
  puVar4[-0x346] = 0x908514;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xe0e];
  *puVar1 = extraout_XMM0_Da_x01529;
  puVar1[1] = extraout_XMM0_Db_x01529;
  puVar1[2] = extraout_XMM0_Dc_x01529;
  puVar1[3] = extraout_XMM0_Dd_x01529;
  puVar4[-0x346] = 0x908534;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xe06];
  *puVar1 = extraout_XMM0_Da_x01530;
  puVar1[1] = extraout_XMM0_Db_x01530;
  puVar1[2] = extraout_XMM0_Dc_x01530;
  puVar1[3] = extraout_XMM0_Dd_x01530;
  puVar4[0xc3f] = puVar4[0x1dfd];
  puVar4[0xc40] = puVar4[0x1dfe];
  puVar4[0xc41] = puVar4[0x1dfb];
  puVar4[0xc42] = puVar4[0x1dfc];
  puVar4[0xc43] = puVar4[0x1df9];
  puVar4[0xc44] = puVar4[0x1dfa];
  puVar4[0xc45] = puVar4[0x1df5];
  puVar4[0xc46] = puVar4[0x1df6];
  puVar4[0xc47] = puVar4[0x1df3];
  puVar4[0xc48] = puVar4[0x1df4];
  puVar4[0xc49] = puVar4[0x1df1];
  puVar4[0xc4a] = puVar4[0x1df2];
  puVar4[-0x346] = 0x9085ab;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xc3d) = extraout_XMM0_Da_x01531;
  *(undefined4 *)((long)puVar4 + 0x61ec) = extraout_XMM0_Db_x01531;
  *(undefined4 *)(puVar4 + 0xc3e) = extraout_XMM0_Dc_x01531;
  *(undefined4 *)((long)puVar4 + 0x61f4) = extraout_XMM0_Dd_x01531;
  puVar4[-0x346] = 0x9085c0;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xc3b) = extraout_XMM0_Da_x01532;
  *(undefined4 *)((long)puVar4 + 0x61dc) = extraout_XMM0_Db_x01532;
  *(undefined4 *)(puVar4 + 0xc3c) = extraout_XMM0_Dc_x01532;
  *(undefined4 *)((long)puVar4 + 0x61e4) = extraout_XMM0_Dd_x01532;
  puVar4[0xc39] = puVar4[0x1deb];
  puVar4[0xc3a] = puVar4[0x1dec];
  puVar4[-0x346] = 0x9085e5;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x908605;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x908615;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xdfd] = puVar4[0xc3f];
  puVar4[0xdfe] = puVar4[0xc40];
  puVar4[0xdfb] = puVar4[0xc41];
  puVar4[0xdfc] = puVar4[0xc42];
  puVar4[0xdf9] = puVar4[0xc43];
  puVar4[0xdfa] = puVar4[0xc44];
  puVar4[0xdf8] = puVar4[0xcb6];
  puVar4[0xdf5] = puVar4[0xc45];
  puVar4[0xdf6] = puVar4[0xc46];
  puVar4[0xdf3] = puVar4[0xc47];
  puVar4[0xdf4] = puVar4[0xc48];
  puVar4[0xdf1] = puVar4[0xc49];
  puVar4[0xdf2] = puVar4[0xc4a];
  puVar4[0xdf0] = puVar4[0xcae];
  *(undefined4 *)(puVar4 + 0xded) = extraout_XMM0_Da_x01533;
  *(undefined4 *)((long)puVar4 + 0x6f6c) = extraout_XMM0_Db_x01533;
  *(undefined4 *)(puVar4 + 0xdee) = extraout_XMM0_Dc_x01533;
  *(undefined4 *)((long)puVar4 + 0x6f74) = extraout_XMM0_Dd_x01533;
  uVar2 = ((undefined8 *)puVar4[0xdf0])[1];
  puVar4[0xc4d] = *(undefined8 *)puVar4[0xdf0];
  puVar4[0xc4e] = uVar2;
  puVar4[-0x346] = 0x9086bd;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xc4b) = extraout_XMM0_Da_x01534;
  *(undefined4 *)((long)puVar4 + 0x625c) = extraout_XMM0_Db_x01534;
  *(undefined4 *)(puVar4 + 0xc4c) = extraout_XMM0_Dc_x01534;
  *(undefined4 *)((long)puVar4 + 0x6264) = extraout_XMM0_Dd_x01534;
  puVar4[-0x346] = 0x9086e2;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x908702;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xdeb) = extraout_XMM0_Da_x01535;
  *(undefined4 *)((long)puVar4 + 0x6f5c) = extraout_XMM0_Db_x01535;
  *(undefined4 *)(puVar4 + 0xdec) = extraout_XMM0_Dc_x01535;
  *(undefined4 *)((long)puVar4 + 0x6f64) = extraout_XMM0_Dd_x01535;
  puVar4[-0x346] = 0x908717;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xc4f) = extraout_XMM0_Da_x01536;
  *(undefined4 *)((long)puVar4 + 0x627c) = extraout_XMM0_Db_x01536;
  *(undefined4 *)(puVar4 + 0xc50) = extraout_XMM0_Dc_x01536;
  *(undefined4 *)((long)puVar4 + 0x6284) = extraout_XMM0_Dd_x01536;
  puVar4[-0x346] = 0x90873c;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90874c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xde9) = extraout_XMM0_Da_x01537;
  *(undefined4 *)((long)puVar4 + 0x6f4c) = extraout_XMM0_Db_x01537;
  *(undefined4 *)(puVar4 + 0xdea) = extraout_XMM0_Dc_x01537;
  *(undefined4 *)((long)puVar4 + 0x6f54) = extraout_XMM0_Dd_x01537;
  puVar4[-0x346] = 0x90876c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xdf8];
  *puVar1 = extraout_XMM0_Da_x01538;
  puVar1[1] = extraout_XMM0_Db_x01538;
  puVar1[2] = extraout_XMM0_Dc_x01538;
  puVar1[3] = extraout_XMM0_Dd_x01538;
  puVar4[-0x346] = 0x90878c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xdf0];
  *puVar1 = extraout_XMM0_Da_x01539;
  puVar1[1] = extraout_XMM0_Db_x01539;
  puVar1[2] = extraout_XMM0_Dc_x01539;
  puVar1[3] = extraout_XMM0_Dd_x01539;
  puVar4[0xc59] = puVar4[0x1def];
  puVar4[0xc5a] = puVar4[0x1df0];
  puVar4[0xc5b] = puVar4[0x1dfd];
  puVar4[0xc5c] = puVar4[0x1dfe];
  puVar4[0xc5d] = puVar4[0x1dfb];
  puVar4[0xc5e] = puVar4[0x1dfc];
  puVar4[0xc5f] = puVar4[0x1df7];
  puVar4[0xc60] = puVar4[0x1df8];
  puVar4[0xc61] = puVar4[0x1df5];
  puVar4[0xc62] = puVar4[0x1df6];
  puVar4[0xc63] = puVar4[0x1df3];
  puVar4[0xc64] = puVar4[0x1df4];
  puVar4[-0x346] = 0x908803;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xc57) = extraout_XMM0_Da_x01540;
  *(undefined4 *)((long)puVar4 + 0x62bc) = extraout_XMM0_Db_x01540;
  *(undefined4 *)(puVar4 + 0xc58) = extraout_XMM0_Dc_x01540;
  *(undefined4 *)((long)puVar4 + 0x62c4) = extraout_XMM0_Dd_x01540;
  puVar4[-0x346] = 0x908818;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xc55) = extraout_XMM0_Da_x01541;
  *(undefined4 *)((long)puVar4 + 0x62ac) = extraout_XMM0_Db_x01541;
  *(undefined4 *)(puVar4 + 0xc56) = extraout_XMM0_Dc_x01541;
  *(undefined4 *)((long)puVar4 + 0x62b4) = extraout_XMM0_Dd_x01541;
  puVar4[0xc53] = puVar4[0x1de9];
  puVar4[0xc54] = puVar4[0x1dea];
  puVar4[-0x346] = 0x90883d;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x90885d;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x90886d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xde7] = puVar4[0xc59];
  puVar4[0xde8] = puVar4[0xc5a];
  puVar4[0xde5] = puVar4[0xc5b];
  puVar4[0xde6] = puVar4[0xc5c];
  puVar4[0xde3] = puVar4[0xc5d];
  puVar4[0xde4] = puVar4[0xc5e];
  puVar4[0xde2] = puVar4[0xcd4];
  puVar4[0xddf] = puVar4[0xc5f];
  puVar4[0xde0] = puVar4[0xc60];
  puVar4[0xddd] = puVar4[0xc61];
  puVar4[0xdde] = puVar4[0xc62];
  puVar4[0xddb] = puVar4[0xc63];
  puVar4[0xddc] = puVar4[0xc64];
  puVar4[0xdda] = puVar4[0xccc];
  *(undefined4 *)(puVar4 + 0xdd7) = extraout_XMM0_Da_x01542;
  *(undefined4 *)((long)puVar4 + 0x6ebc) = extraout_XMM0_Db_x01542;
  *(undefined4 *)(puVar4 + 0xdd8) = extraout_XMM0_Dc_x01542;
  *(undefined4 *)((long)puVar4 + 0x6ec4) = extraout_XMM0_Dd_x01542;
  uVar2 = ((undefined8 *)puVar4[0xdda])[1];
  puVar4[0xc67] = *(undefined8 *)puVar4[0xdda];
  puVar4[0xc68] = uVar2;
  puVar4[-0x346] = 0x908915;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xc65) = extraout_XMM0_Da_x01543;
  *(undefined4 *)((long)puVar4 + 0x632c) = extraout_XMM0_Db_x01543;
  *(undefined4 *)(puVar4 + 0xc66) = extraout_XMM0_Dc_x01543;
  *(undefined4 *)((long)puVar4 + 0x6334) = extraout_XMM0_Dd_x01543;
  puVar4[-0x346] = 0x90893a;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90895a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xdd5) = extraout_XMM0_Da_x01544;
  *(undefined4 *)((long)puVar4 + 0x6eac) = extraout_XMM0_Db_x01544;
  *(undefined4 *)(puVar4 + 0xdd6) = extraout_XMM0_Dc_x01544;
  *(undefined4 *)((long)puVar4 + 0x6eb4) = extraout_XMM0_Dd_x01544;
  puVar4[-0x346] = 0x90896f;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xc69) = extraout_XMM0_Da_x01545;
  *(undefined4 *)((long)puVar4 + 0x634c) = extraout_XMM0_Db_x01545;
  *(undefined4 *)(puVar4 + 0xc6a) = extraout_XMM0_Dc_x01545;
  *(undefined4 *)((long)puVar4 + 0x6354) = extraout_XMM0_Dd_x01545;
  puVar4[-0x346] = 0x908994;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9089a4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xdd3) = extraout_XMM0_Da_x01546;
  *(undefined4 *)((long)puVar4 + 0x6e9c) = extraout_XMM0_Db_x01546;
  *(undefined4 *)(puVar4 + 0xdd4) = extraout_XMM0_Dc_x01546;
  *(undefined4 *)((long)puVar4 + 0x6ea4) = extraout_XMM0_Dd_x01546;
  puVar4[-0x346] = 0x9089c4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xde2];
  *puVar1 = extraout_XMM0_Da_x01547;
  puVar1[1] = extraout_XMM0_Db_x01547;
  puVar1[2] = extraout_XMM0_Dc_x01547;
  puVar1[3] = extraout_XMM0_Dd_x01547;
  puVar4[-0x346] = 0x9089e4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xdda];
  *puVar1 = extraout_XMM0_Da_x01548;
  puVar1[1] = extraout_XMM0_Db_x01548;
  puVar1[2] = extraout_XMM0_Dc_x01548;
  puVar1[3] = extraout_XMM0_Dd_x01548;
  puVar4[0xc73] = puVar4[0x1df1];
  puVar4[0xc74] = puVar4[0x1df2];
  puVar4[0xc75] = puVar4[0x1def];
  puVar4[0xc76] = puVar4[0x1df0];
  puVar4[0xc77] = puVar4[0x1dfd];
  puVar4[0xc78] = puVar4[0x1dfe];
  puVar4[0xc79] = puVar4[0x1df9];
  puVar4[0xc7a] = puVar4[0x1dfa];
  puVar4[0xc7b] = puVar4[0x1df7];
  puVar4[0xc7c] = puVar4[0x1df8];
  puVar4[0xc7d] = puVar4[0x1df5];
  puVar4[0xc7e] = puVar4[0x1df6];
  puVar4[-0x346] = 0x908a5b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xc71) = extraout_XMM0_Da_x01549;
  *(undefined4 *)((long)puVar4 + 0x638c) = extraout_XMM0_Db_x01549;
  *(undefined4 *)(puVar4 + 0xc72) = extraout_XMM0_Dc_x01549;
  *(undefined4 *)((long)puVar4 + 0x6394) = extraout_XMM0_Dd_x01549;
  puVar4[-0x346] = 0x908a70;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xc6f) = extraout_XMM0_Da_x01550;
  *(undefined4 *)((long)puVar4 + 0x637c) = extraout_XMM0_Db_x01550;
  *(undefined4 *)(puVar4 + 0xc70) = extraout_XMM0_Dc_x01550;
  *(undefined4 *)((long)puVar4 + 0x6384) = extraout_XMM0_Dd_x01550;
  puVar4[0xc6d] = puVar4[0x1de7];
  puVar4[0xc6e] = puVar4[0x1de8];
  puVar4[-0x346] = 0x908a95;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x908ab5;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x908ac5;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xdd1] = puVar4[0xc73];
  puVar4[0xdd2] = puVar4[0xc74];
  puVar4[0xdcf] = puVar4[0xc75];
  puVar4[0xdd0] = puVar4[0xc76];
  puVar4[0xdcd] = puVar4[0xc77];
  puVar4[0xdce] = puVar4[0xc78];
  puVar4[0xdcc] = puVar4[0xcf4];
  puVar4[0xdc9] = puVar4[0xc79];
  puVar4[0xdca] = puVar4[0xc7a];
  puVar4[0xdc7] = puVar4[0xc7b];
  puVar4[0xdc8] = puVar4[0xc7c];
  puVar4[0xdc5] = puVar4[0xc7d];
  puVar4[0xdc6] = puVar4[0xc7e];
  puVar4[0xdc4] = puVar4[0xcec];
  *(undefined4 *)(puVar4 + 0xdc1) = extraout_XMM0_Da_x01551;
  *(undefined4 *)((long)puVar4 + 0x6e0c) = extraout_XMM0_Db_x01551;
  *(undefined4 *)(puVar4 + 0xdc2) = extraout_XMM0_Dc_x01551;
  *(undefined4 *)((long)puVar4 + 0x6e14) = extraout_XMM0_Dd_x01551;
  uVar2 = ((undefined8 *)puVar4[0xdc4])[1];
  puVar4[0xc81] = *(undefined8 *)puVar4[0xdc4];
  puVar4[0xc82] = uVar2;
  puVar4[-0x346] = 0x908b6d;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xc7f) = extraout_XMM0_Da_x01552;
  *(undefined4 *)((long)puVar4 + 0x63fc) = extraout_XMM0_Db_x01552;
  *(undefined4 *)(puVar4 + 0xc80) = extraout_XMM0_Dc_x01552;
  *(undefined4 *)((long)puVar4 + 0x6404) = extraout_XMM0_Dd_x01552;
  puVar4[-0x346] = 0x908b92;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x908bb2;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xdbf) = extraout_XMM0_Da_x01553;
  *(undefined4 *)((long)puVar4 + 0x6dfc) = extraout_XMM0_Db_x01553;
  *(undefined4 *)(puVar4 + 0xdc0) = extraout_XMM0_Dc_x01553;
  *(undefined4 *)((long)puVar4 + 0x6e04) = extraout_XMM0_Dd_x01553;
  puVar4[-0x346] = 0x908bc7;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xc83) = extraout_XMM0_Da_x01554;
  *(undefined4 *)((long)puVar4 + 0x641c) = extraout_XMM0_Db_x01554;
  *(undefined4 *)(puVar4 + 0xc84) = extraout_XMM0_Dc_x01554;
  *(undefined4 *)((long)puVar4 + 0x6424) = extraout_XMM0_Dd_x01554;
  puVar4[-0x346] = 0x908bec;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x908bfc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xdbd) = extraout_XMM0_Da_x01555;
  *(undefined4 *)((long)puVar4 + 0x6dec) = extraout_XMM0_Db_x01555;
  *(undefined4 *)(puVar4 + 0xdbe) = extraout_XMM0_Dc_x01555;
  *(undefined4 *)((long)puVar4 + 0x6df4) = extraout_XMM0_Dd_x01555;
  puVar4[-0x346] = 0x908c1c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xdcc];
  *puVar1 = extraout_XMM0_Da_x01556;
  puVar1[1] = extraout_XMM0_Db_x01556;
  puVar1[2] = extraout_XMM0_Dc_x01556;
  puVar1[3] = extraout_XMM0_Dd_x01556;
  puVar4[-0x346] = 0x908c3c;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xdc4];
  *puVar1 = extraout_XMM0_Da_x01557;
  puVar1[1] = extraout_XMM0_Db_x01557;
  puVar1[2] = extraout_XMM0_Dc_x01557;
  puVar1[3] = extraout_XMM0_Dd_x01557;
  puVar4[0xc8d] = puVar4[0x1df3];
  puVar4[0xc8e] = puVar4[0x1df4];
  puVar4[0xc8f] = puVar4[0x1df1];
  puVar4[0xc90] = puVar4[0x1df2];
  puVar4[0xc91] = puVar4[0x1def];
  puVar4[0xc92] = puVar4[0x1df0];
  puVar4[0xc93] = puVar4[0x1dfb];
  puVar4[0xc94] = puVar4[0x1dfc];
  puVar4[0xc95] = puVar4[0x1df9];
  puVar4[0xc96] = puVar4[0x1dfa];
  puVar4[0xc97] = puVar4[0x1df7];
  puVar4[0xc98] = puVar4[0x1df8];
  puVar4[-0x346] = 0x908cb3;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xc8b) = extraout_XMM0_Da_x01558;
  *(undefined4 *)((long)puVar4 + 0x645c) = extraout_XMM0_Db_x01558;
  *(undefined4 *)(puVar4 + 0xc8c) = extraout_XMM0_Dc_x01558;
  *(undefined4 *)((long)puVar4 + 0x6464) = extraout_XMM0_Dd_x01558;
  puVar4[-0x346] = 0x908cc8;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xc89) = extraout_XMM0_Da_x01559;
  *(undefined4 *)((long)puVar4 + 0x644c) = extraout_XMM0_Db_x01559;
  *(undefined4 *)(puVar4 + 0xc8a) = extraout_XMM0_Dc_x01559;
  *(undefined4 *)((long)puVar4 + 0x6454) = extraout_XMM0_Dd_x01559;
  puVar4[0xc87] = puVar4[0x1de5];
  puVar4[0xc88] = puVar4[0x1de6];
  puVar4[-0x346] = 0x908ced;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x908d0d;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x908d1d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xdbb] = puVar4[0xc8d];
  puVar4[0xdbc] = puVar4[0xc8e];
  puVar4[0xdb9] = puVar4[0xc8f];
  puVar4[0xdba] = puVar4[0xc90];
  puVar4[0xdb7] = puVar4[0xc91];
  puVar4[0xdb8] = puVar4[0xc92];
  puVar4[0xdb6] = puVar4[0xd14];
  puVar4[0xdb3] = puVar4[0xc93];
  puVar4[0xdb4] = puVar4[0xc94];
  puVar4[0xdb1] = puVar4[0xc95];
  puVar4[0xdb2] = puVar4[0xc96];
  puVar4[0xdaf] = puVar4[0xc97];
  puVar4[0xdb0] = puVar4[0xc98];
  puVar4[0xdae] = puVar4[0xd0c];
  *(undefined4 *)(puVar4 + 0xdab) = extraout_XMM0_Da_x01560;
  *(undefined4 *)((long)puVar4 + 0x6d5c) = extraout_XMM0_Db_x01560;
  *(undefined4 *)(puVar4 + 0xdac) = extraout_XMM0_Dc_x01560;
  *(undefined4 *)((long)puVar4 + 0x6d64) = extraout_XMM0_Dd_x01560;
  uVar2 = ((undefined8 *)puVar4[0xdae])[1];
  puVar4[0xc9b] = *(undefined8 *)puVar4[0xdae];
  puVar4[0xc9c] = uVar2;
  puVar4[-0x346] = 0x908dc5;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xc99) = extraout_XMM0_Da_x01561;
  *(undefined4 *)((long)puVar4 + 0x64cc) = extraout_XMM0_Db_x01561;
  *(undefined4 *)(puVar4 + 0xc9a) = extraout_XMM0_Dc_x01561;
  *(undefined4 *)((long)puVar4 + 0x64d4) = extraout_XMM0_Dd_x01561;
  puVar4[-0x346] = 0x908dea;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x908e0a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xda9) = extraout_XMM0_Da_x01562;
  *(undefined4 *)((long)puVar4 + 0x6d4c) = extraout_XMM0_Db_x01562;
  *(undefined4 *)(puVar4 + 0xdaa) = extraout_XMM0_Dc_x01562;
  *(undefined4 *)((long)puVar4 + 0x6d54) = extraout_XMM0_Dd_x01562;
  puVar4[-0x346] = 0x908e1f;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xc9d) = extraout_XMM0_Da_x01563;
  *(undefined4 *)((long)puVar4 + 0x64ec) = extraout_XMM0_Db_x01563;
  *(undefined4 *)(puVar4 + 0xc9e) = extraout_XMM0_Dc_x01563;
  *(undefined4 *)((long)puVar4 + 0x64f4) = extraout_XMM0_Dd_x01563;
  puVar4[-0x346] = 0x908e44;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x908e54;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xda7) = extraout_XMM0_Da_x01564;
  *(undefined4 *)((long)puVar4 + 0x6d3c) = extraout_XMM0_Db_x01564;
  *(undefined4 *)(puVar4 + 0xda8) = extraout_XMM0_Dc_x01564;
  *(undefined4 *)((long)puVar4 + 0x6d44) = extraout_XMM0_Dd_x01564;
  puVar4[-0x346] = 0x908e74;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xdb6];
  *puVar1 = extraout_XMM0_Da_x01565;
  puVar1[1] = extraout_XMM0_Db_x01565;
  puVar1[2] = extraout_XMM0_Dc_x01565;
  puVar1[3] = extraout_XMM0_Dd_x01565;
  puVar4[-0x346] = 0x908e94;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xdae];
  *puVar1 = extraout_XMM0_Da_x01566;
  puVar1[1] = extraout_XMM0_Db_x01566;
  puVar1[2] = extraout_XMM0_Dc_x01566;
  puVar1[3] = extraout_XMM0_Dd_x01566;
  puVar4[0xca7] = puVar4[0x1df5];
  puVar4[0xca8] = puVar4[0x1df6];
  puVar4[0xca9] = puVar4[0x1df3];
  puVar4[0xcaa] = puVar4[0x1df4];
  puVar4[0xcab] = puVar4[0x1df1];
  puVar4[0xcac] = puVar4[0x1df2];
  puVar4[0xcaf] = puVar4[0x1dfd];
  puVar4[0xcb0] = puVar4[0x1dfe];
  puVar4[0xcb1] = puVar4[0x1dfb];
  puVar4[0xcb2] = puVar4[0x1dfc];
  puVar4[0xcb3] = puVar4[0x1df9];
  puVar4[0xcb4] = puVar4[0x1dfa];
  puVar4[-0x346] = 0x908f0b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xca5) = extraout_XMM0_Da_x01567;
  *(undefined4 *)((long)puVar4 + 0x652c) = extraout_XMM0_Db_x01567;
  *(undefined4 *)(puVar4 + 0xca6) = extraout_XMM0_Dc_x01567;
  *(undefined4 *)((long)puVar4 + 0x6534) = extraout_XMM0_Dd_x01567;
  puVar4[-0x346] = 0x908f20;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xca3) = extraout_XMM0_Da_x01568;
  *(undefined4 *)((long)puVar4 + 0x651c) = extraout_XMM0_Db_x01568;
  *(undefined4 *)(puVar4 + 0xca4) = extraout_XMM0_Dc_x01568;
  *(undefined4 *)((long)puVar4 + 0x6524) = extraout_XMM0_Dd_x01568;
  puVar4[0xca1] = puVar4[0x1de3];
  puVar4[0xca2] = puVar4[0x1de4];
  puVar4[-0x346] = 0x908f45;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x908f65;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x908f75;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xda5] = puVar4[0xca7];
  puVar4[0xda6] = puVar4[0xca8];
  puVar4[0xda3] = puVar4[0xca9];
  puVar4[0xda4] = puVar4[0xcaa];
  puVar4[0xda1] = puVar4[0xcab];
  puVar4[0xda2] = puVar4[0xcac];
  puVar4[0xda0] = puVar4[0xcae];
  puVar4[0xd9d] = puVar4[0xcaf];
  puVar4[0xd9e] = puVar4[0xcb0];
  puVar4[0xd9b] = puVar4[0xcb1];
  puVar4[0xd9c] = puVar4[0xcb2];
  puVar4[0xd99] = puVar4[0xcb3];
  puVar4[0xd9a] = puVar4[0xcb4];
  puVar4[0xd98] = puVar4[0xcb6];
  *(undefined4 *)(puVar4 + 0xd95) = extraout_XMM0_Da_x01569;
  *(undefined4 *)((long)puVar4 + 0x6cac) = extraout_XMM0_Db_x01569;
  *(undefined4 *)(puVar4 + 0xd96) = extraout_XMM0_Dc_x01569;
  *(undefined4 *)((long)puVar4 + 0x6cb4) = extraout_XMM0_Dd_x01569;
  uVar2 = ((undefined8 *)puVar4[0xd98])[1];
  puVar4[0xcb9] = *(undefined8 *)puVar4[0xd98];
  puVar4[0xcba] = uVar2;
  puVar4[-0x346] = 0x90901d;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xcb7) = extraout_XMM0_Da_x01570;
  *(undefined4 *)((long)puVar4 + 0x65bc) = extraout_XMM0_Db_x01570;
  *(undefined4 *)(puVar4 + 0xcb8) = extraout_XMM0_Dc_x01570;
  *(undefined4 *)((long)puVar4 + 0x65c4) = extraout_XMM0_Dd_x01570;
  puVar4[-0x346] = 0x909042;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x909062;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xd93) = extraout_XMM0_Da_x01571;
  *(undefined4 *)((long)puVar4 + 0x6c9c) = extraout_XMM0_Db_x01571;
  *(undefined4 *)(puVar4 + 0xd94) = extraout_XMM0_Dc_x01571;
  *(undefined4 *)((long)puVar4 + 0x6ca4) = extraout_XMM0_Dd_x01571;
  puVar4[-0x346] = 0x909077;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xcbb) = extraout_XMM0_Da_x01572;
  *(undefined4 *)((long)puVar4 + 0x65dc) = extraout_XMM0_Db_x01572;
  *(undefined4 *)(puVar4 + 0xcbc) = extraout_XMM0_Dc_x01572;
  *(undefined4 *)((long)puVar4 + 0x65e4) = extraout_XMM0_Dd_x01572;
  puVar4[-0x346] = 0x90909c;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9090ac;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xd91) = extraout_XMM0_Da_x01573;
  *(undefined4 *)((long)puVar4 + 0x6c8c) = extraout_XMM0_Db_x01573;
  *(undefined4 *)(puVar4 + 0xd92) = extraout_XMM0_Dc_x01573;
  *(undefined4 *)((long)puVar4 + 0x6c94) = extraout_XMM0_Dd_x01573;
  puVar4[-0x346] = 0x9090cc;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xda0];
  *puVar1 = extraout_XMM0_Da_x01574;
  puVar1[1] = extraout_XMM0_Db_x01574;
  puVar1[2] = extraout_XMM0_Dc_x01574;
  puVar1[3] = extraout_XMM0_Dd_x01574;
  puVar4[-0x346] = 0x9090ec;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xd98];
  *puVar1 = extraout_XMM0_Da_x01575;
  puVar1[1] = extraout_XMM0_Db_x01575;
  puVar1[2] = extraout_XMM0_Dc_x01575;
  puVar1[3] = extraout_XMM0_Dd_x01575;
  puVar4[0xcc5] = puVar4[0x1df7];
  puVar4[0xcc6] = puVar4[0x1df8];
  puVar4[0xcc7] = puVar4[0x1df5];
  puVar4[0xcc8] = puVar4[0x1df6];
  puVar4[0xcc9] = puVar4[0x1df3];
  puVar4[0xcca] = puVar4[0x1df4];
  puVar4[0xccd] = puVar4[0x1def];
  puVar4[0xcce] = puVar4[0x1df0];
  puVar4[0xccf] = puVar4[0x1dfd];
  puVar4[0xcd0] = puVar4[0x1dfe];
  puVar4[0xcd1] = puVar4[0x1dfb];
  puVar4[0xcd2] = puVar4[0x1dfc];
  puVar4[-0x346] = 0x909163;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xcc3) = extraout_XMM0_Da_x01576;
  *(undefined4 *)((long)puVar4 + 0x661c) = extraout_XMM0_Db_x01576;
  *(undefined4 *)(puVar4 + 0xcc4) = extraout_XMM0_Dc_x01576;
  *(undefined4 *)((long)puVar4 + 0x6624) = extraout_XMM0_Dd_x01576;
  puVar4[-0x346] = 0x909178;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xcc1) = extraout_XMM0_Da_x01577;
  *(undefined4 *)((long)puVar4 + 0x660c) = extraout_XMM0_Db_x01577;
  *(undefined4 *)(puVar4 + 0xcc2) = extraout_XMM0_Dc_x01577;
  *(undefined4 *)((long)puVar4 + 0x6614) = extraout_XMM0_Dd_x01577;
  puVar4[0xcbf] = puVar4[0x1de1];
  puVar4[0xcc0] = puVar4[0x1de2];
  puVar4[-0x346] = 0x90919d;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x9091bd;
  anon_unknown_0::Inc((__m128i *)puVar4[-0x33d],*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x9091cd;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[0xd8f] = puVar4[0xcc5];
  puVar4[0xd90] = puVar4[0xcc6];
  puVar4[0xd8d] = puVar4[0xcc7];
  puVar4[0xd8e] = puVar4[0xcc8];
  puVar4[0xd8b] = puVar4[0xcc9];
  puVar4[0xd8c] = puVar4[0xcca];
  puVar4[0xd8a] = puVar4[0xccc];
  puVar4[0xd87] = puVar4[0xccd];
  puVar4[0xd88] = puVar4[0xcce];
  puVar4[0xd85] = puVar4[0xccf];
  puVar4[0xd86] = puVar4[0xcd0];
  puVar4[0xd83] = puVar4[0xcd1];
  puVar4[0xd84] = puVar4[0xcd2];
  puVar4[0xd82] = puVar4[0xcd4];
  *(undefined4 *)(puVar4 + 0xd7f) = extraout_XMM0_Da_x01578;
  *(undefined4 *)((long)puVar4 + 0x6bfc) = extraout_XMM0_Db_x01578;
  *(undefined4 *)(puVar4 + 0xd80) = extraout_XMM0_Dc_x01578;
  *(undefined4 *)((long)puVar4 + 0x6c04) = extraout_XMM0_Dd_x01578;
  uVar2 = ((undefined8 *)puVar4[0xd82])[1];
  puVar4[0xcd7] = *(undefined8 *)puVar4[0xd82];
  puVar4[0xcd8] = uVar2;
  puVar4[-0x346] = 0x909275;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xcd5) = extraout_XMM0_Da_x01579;
  *(undefined4 *)((long)puVar4 + 0x66ac) = extraout_XMM0_Db_x01579;
  *(undefined4 *)(puVar4 + 0xcd6) = extraout_XMM0_Dc_x01579;
  *(undefined4 *)((long)puVar4 + 0x66b4) = extraout_XMM0_Dd_x01579;
  puVar4[-0x346] = 0x90929a;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9092ba;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xd7d) = extraout_XMM0_Da_x01580;
  *(undefined4 *)((long)puVar4 + 0x6bec) = extraout_XMM0_Db_x01580;
  *(undefined4 *)(puVar4 + 0xd7e) = extraout_XMM0_Dc_x01580;
  *(undefined4 *)((long)puVar4 + 0x6bf4) = extraout_XMM0_Dd_x01580;
  puVar4[-0x346] = 0x9092cf;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xcd9) = extraout_XMM0_Da_x01581;
  *(undefined4 *)((long)puVar4 + 0x66cc) = extraout_XMM0_Db_x01581;
  *(undefined4 *)(puVar4 + 0xcda) = extraout_XMM0_Dc_x01581;
  *(undefined4 *)((long)puVar4 + 0x66d4) = extraout_XMM0_Dd_x01581;
  puVar4[-0x346] = 0x9092f4;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x909304;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xd7b) = extraout_XMM0_Da_x01582;
  *(undefined4 *)((long)puVar4 + 0x6bdc) = extraout_XMM0_Db_x01582;
  *(undefined4 *)(puVar4 + 0xd7c) = extraout_XMM0_Dc_x01582;
  *(undefined4 *)((long)puVar4 + 0x6be4) = extraout_XMM0_Dd_x01582;
  puVar4[-0x346] = 0x909324;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xd8a];
  *puVar1 = extraout_XMM0_Da_x01583;
  puVar1[1] = extraout_XMM0_Db_x01583;
  puVar1[2] = extraout_XMM0_Dc_x01583;
  puVar1[3] = extraout_XMM0_Dd_x01583;
  puVar4[-0x346] = 0x909344;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xd82];
  *puVar1 = extraout_XMM0_Da_x01584;
  puVar1[1] = extraout_XMM0_Db_x01584;
  puVar1[2] = extraout_XMM0_Dc_x01584;
  puVar1[3] = extraout_XMM0_Dd_x01584;
  puVar4[0xce5] = puVar4[0x1df9];
  puVar4[0xce6] = puVar4[0x1dfa];
  puVar4[0xce7] = puVar4[0x1df7];
  puVar4[0xce8] = puVar4[0x1df8];
  puVar4[0xce9] = puVar4[0x1df5];
  puVar4[0xcea] = puVar4[0x1df6];
  puVar4[0xced] = puVar4[0x1df1];
  puVar4[0xcee] = puVar4[0x1df2];
  puVar4[0xcef] = puVar4[0x1def];
  puVar4[0xcf0] = puVar4[0x1df0];
  puVar4[0xcf1] = puVar4[0x1dfd];
  puVar4[0xcf2] = puVar4[0x1dfe];
  puVar4[-0x346] = 0x9093bb;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xce3) = extraout_XMM0_Da_x01585;
  *(undefined4 *)((long)puVar4 + 0x671c) = extraout_XMM0_Db_x01585;
  *(undefined4 *)(puVar4 + 0xce4) = extraout_XMM0_Dc_x01585;
  *(undefined4 *)((long)puVar4 + 0x6724) = extraout_XMM0_Dd_x01585;
  puVar4[0xcdd] = puVar4[0x1dd1];
  puVar4[0xcde] = puVar4[0x1dd2];
  puVar4[-0x346] = 0x9093e0;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xcdf) = extraout_XMM0_Da_x01586;
  *(undefined4 *)((long)puVar4 + 0x66fc) = extraout_XMM0_Db_x01586;
  *(undefined4 *)(puVar4 + 0xce0) = extraout_XMM0_Dc_x01586;
  *(undefined4 *)((long)puVar4 + 0x6704) = extraout_XMM0_Dd_x01586;
  puVar4[0xce1] = puVar4[0x1ddf];
  puVar4[0xce2] = puVar4[0x1de0];
  puVar4[-0x346] = 0x909405;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x90942d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33a),*(__m128i *)(puVar4 + -0x33c),
                      *(__m128i *)(puVar4 + -0x33e),*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342));
  puVar4[0xd79] = puVar4[0xce5];
  puVar4[0xd7a] = puVar4[0xce6];
  puVar4[0xd77] = puVar4[0xce7];
  puVar4[0xd78] = puVar4[0xce8];
  puVar4[0xd75] = puVar4[0xce9];
  puVar4[0xd76] = puVar4[0xcea];
  puVar4[0xd74] = puVar4[0xcec];
  puVar4[0xd71] = puVar4[0xced];
  puVar4[0xd72] = puVar4[0xcee];
  puVar4[0xd6f] = puVar4[0xcef];
  puVar4[0xd70] = puVar4[0xcf0];
  puVar4[0xd6d] = puVar4[0xcf1];
  puVar4[0xd6e] = puVar4[0xcf2];
  puVar4[0xd6c] = puVar4[0xcf4];
  *(undefined4 *)(puVar4 + 0xd69) = extraout_XMM0_Da_x01587;
  *(undefined4 *)((long)puVar4 + 0x6b4c) = extraout_XMM0_Db_x01587;
  *(undefined4 *)(puVar4 + 0xd6a) = extraout_XMM0_Dc_x01587;
  *(undefined4 *)((long)puVar4 + 0x6b54) = extraout_XMM0_Dd_x01587;
  uVar2 = ((undefined8 *)puVar4[0xd6c])[1];
  puVar4[0xcf7] = *(undefined8 *)puVar4[0xd6c];
  puVar4[0xcf8] = uVar2;
  puVar4[-0x346] = 0x9094d5;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xcf5) = extraout_XMM0_Da_x01588;
  *(undefined4 *)((long)puVar4 + 0x67ac) = extraout_XMM0_Db_x01588;
  *(undefined4 *)(puVar4 + 0xcf6) = extraout_XMM0_Dc_x01588;
  *(undefined4 *)((long)puVar4 + 0x67b4) = extraout_XMM0_Dd_x01588;
  puVar4[-0x346] = 0x9094fa;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90951a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xd67) = extraout_XMM0_Da_x01589;
  *(undefined4 *)((long)puVar4 + 0x6b3c) = extraout_XMM0_Db_x01589;
  *(undefined4 *)(puVar4 + 0xd68) = extraout_XMM0_Dc_x01589;
  *(undefined4 *)((long)puVar4 + 0x6b44) = extraout_XMM0_Dd_x01589;
  puVar4[-0x346] = 0x90952f;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xcf9) = extraout_XMM0_Da_x01590;
  *(undefined4 *)((long)puVar4 + 0x67cc) = extraout_XMM0_Db_x01590;
  *(undefined4 *)(puVar4 + 0xcfa) = extraout_XMM0_Dc_x01590;
  *(undefined4 *)((long)puVar4 + 0x67d4) = extraout_XMM0_Dd_x01590;
  puVar4[-0x346] = 0x909554;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x909564;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xd65) = extraout_XMM0_Da_x01591;
  *(undefined4 *)((long)puVar4 + 0x6b2c) = extraout_XMM0_Db_x01591;
  *(undefined4 *)(puVar4 + 0xd66) = extraout_XMM0_Dc_x01591;
  *(undefined4 *)((long)puVar4 + 0x6b34) = extraout_XMM0_Dd_x01591;
  puVar4[-0x346] = 0x909584;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xd74];
  *puVar1 = extraout_XMM0_Da_x01592;
  puVar1[1] = extraout_XMM0_Db_x01592;
  puVar1[2] = extraout_XMM0_Dc_x01592;
  puVar1[3] = extraout_XMM0_Dd_x01592;
  puVar4[-0x346] = 0x9095a4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xd6c];
  *puVar1 = extraout_XMM0_Da_x01593;
  puVar1[1] = extraout_XMM0_Db_x01593;
  puVar1[2] = extraout_XMM0_Dc_x01593;
  puVar1[3] = extraout_XMM0_Dd_x01593;
  puVar4[0xd05] = puVar4[0x1dfb];
  puVar4[0xd06] = puVar4[0x1dfc];
  puVar4[0xd07] = puVar4[0x1df9];
  puVar4[0xd08] = puVar4[0x1dfa];
  puVar4[0xd09] = puVar4[0x1df7];
  puVar4[0xd0a] = puVar4[0x1df8];
  puVar4[0xd0d] = puVar4[0x1df3];
  puVar4[0xd0e] = puVar4[0x1df4];
  puVar4[0xd0f] = puVar4[0x1df1];
  puVar4[0xd10] = puVar4[0x1df2];
  puVar4[0xd11] = puVar4[0x1def];
  puVar4[0xd12] = puVar4[0x1df0];
  puVar4[-0x346] = 0x90961b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  *(undefined4 *)(puVar4 + 0xd03) = extraout_XMM0_Da_x01594;
  *(undefined4 *)((long)puVar4 + 0x681c) = extraout_XMM0_Db_x01594;
  *(undefined4 *)(puVar4 + 0xd04) = extraout_XMM0_Dc_x01594;
  *(undefined4 *)((long)puVar4 + 0x6824) = extraout_XMM0_Dd_x01594;
  puVar4[0xcfd] = puVar4[0x1dcf];
  puVar4[0xcfe] = puVar4[0x1dd0];
  puVar4[-0x346] = 0x909640;
  anon_unknown_0::sigma1(*(__m128i *)(puVar4 + -0x33c));
  *(undefined4 *)(puVar4 + 0xcff) = extraout_XMM0_Da_x01595;
  *(undefined4 *)((long)puVar4 + 0x67fc) = extraout_XMM0_Db_x01595;
  *(undefined4 *)(puVar4 + 0xd00) = extraout_XMM0_Dc_x01595;
  *(undefined4 *)((long)puVar4 + 0x6804) = extraout_XMM0_Dd_x01595;
  puVar4[0xd01] = puVar4[0x1ddd];
  puVar4[0xd02] = puVar4[0x1dde];
  puVar4[-0x346] = 0x909665;
  anon_unknown_0::sigma0(*(__m128i *)(puVar4 + -0x33c));
  puVar4[-0x346] = 0x90968d;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33a),*(__m128i *)(puVar4 + -0x33c),
                      *(__m128i *)(puVar4 + -0x33e),*(__m128i *)(puVar4 + -0x340),
                      *(__m128i *)(puVar4 + -0x342));
  puVar4[0xd63] = puVar4[0xd05];
  puVar4[0xd64] = puVar4[0xd06];
  puVar4[0xd61] = puVar4[0xd07];
  puVar4[0xd62] = puVar4[0xd08];
  puVar4[0xd5f] = puVar4[0xd09];
  puVar4[0xd60] = puVar4[0xd0a];
  puVar4[0xd5e] = puVar4[0xd0c];
  puVar4[0xd5b] = puVar4[0xd0d];
  puVar4[0xd5c] = puVar4[0xd0e];
  puVar4[0xd59] = puVar4[0xd0f];
  puVar4[0xd5a] = puVar4[0xd10];
  puVar4[0xd57] = puVar4[0xd11];
  puVar4[0xd58] = puVar4[0xd12];
  puVar4[0xd56] = puVar4[0xd14];
  *(undefined4 *)(puVar4 + 0xd53) = extraout_XMM0_Da_x01596;
  *(undefined4 *)((long)puVar4 + 0x6a9c) = extraout_XMM0_Db_x01596;
  *(undefined4 *)(puVar4 + 0xd54) = extraout_XMM0_Dc_x01596;
  *(undefined4 *)((long)puVar4 + 0x6aa4) = extraout_XMM0_Dd_x01596;
  uVar2 = ((undefined8 *)puVar4[0xd56])[1];
  puVar4[0xd17] = *(undefined8 *)puVar4[0xd56];
  puVar4[0xd18] = uVar2;
  puVar4[-0x346] = 0x909735;
  anon_unknown_0::Sigma1(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xd15) = extraout_XMM0_Da_x01597;
  *(undefined4 *)((long)puVar4 + 0x68ac) = extraout_XMM0_Db_x01597;
  *(undefined4 *)(puVar4 + 0xd16) = extraout_XMM0_Dc_x01597;
  *(undefined4 *)((long)puVar4 + 0x68b4) = extraout_XMM0_Dd_x01597;
  puVar4[-0x346] = 0x90975a;
  anon_unknown_0::Ch(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                     *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x90977a;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340),*(__m128i *)(puVar4 + -0x342));
  *(undefined4 *)(puVar4 + 0xd51) = extraout_XMM0_Da_x01598;
  *(undefined4 *)((long)puVar4 + 0x6a8c) = extraout_XMM0_Db_x01598;
  *(undefined4 *)(puVar4 + 0xd52) = extraout_XMM0_Dc_x01598;
  *(undefined4 *)((long)puVar4 + 0x6a94) = extraout_XMM0_Dd_x01598;
  puVar4[-0x346] = 0x90978f;
  anon_unknown_0::Sigma0(*(__m128i *)(puVar4 + -0x33a));
  *(undefined4 *)(puVar4 + 0xd19) = extraout_XMM0_Da_x01599;
  *(undefined4 *)((long)puVar4 + 0x68cc) = extraout_XMM0_Db_x01599;
  *(undefined4 *)(puVar4 + 0xd1a) = extraout_XMM0_Dc_x01599;
  *(undefined4 *)((long)puVar4 + 0x68d4) = extraout_XMM0_Dd_x01599;
  puVar4[-0x346] = 0x9097b4;
  anon_unknown_0::Maj(*(__m128i *)(puVar4 + -0x33c),*(__m128i *)(puVar4 + -0x33e),
                      *(__m128i *)(puVar4 + -0x340));
  puVar4[-0x346] = 0x9097c4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  *(undefined4 *)(puVar4 + 0xd4f) = extraout_XMM0_Da_x01600;
  *(undefined4 *)((long)puVar4 + 0x6a7c) = extraout_XMM0_Db_x01600;
  *(undefined4 *)(puVar4 + 0xd50) = extraout_XMM0_Dc_x01600;
  *(undefined4 *)((long)puVar4 + 0x6a84) = extraout_XMM0_Dd_x01600;
  puVar4[-0x346] = 0x9097e4;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xd5e];
  *puVar1 = extraout_XMM0_Da_x01601;
  puVar1[1] = extraout_XMM0_Db_x01601;
  puVar1[2] = extraout_XMM0_Dc_x01601;
  puVar1[3] = extraout_XMM0_Dd_x01601;
  puVar4[-0x346] = 0x909804;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar1 = (undefined4 *)puVar4[0xd56];
  *puVar1 = extraout_XMM0_Da_x01602;
  puVar1[1] = extraout_XMM0_Db_x01602;
  puVar1[2] = extraout_XMM0_Dc_x01602;
  puVar1[3] = extraout_XMM0_Dd_x01602;
  puVar4[0xd1f] = puVar4[0xd4e];
  puVar4[0xd1d] = puVar4[0x1dfd];
  puVar4[0xd1e] = puVar4[0x1dfe];
  puVar4[-0x346] = 0x90983b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x90984b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x90985f;
  anon_unknown_0::Write4
            ((uchar *)puVar4[-0x343],*(int *)((long)puVar4 + -0x1a1c),*(__m128i *)(puVar4 + -0x346))
  ;
  puVar4[0xd23] = puVar4[0xd4e];
  puVar4[0xd21] = puVar4[0x1dfb];
  puVar4[0xd22] = puVar4[0x1dfc];
  puVar4[-0x346] = 0x90988b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x90989b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x9098af;
  anon_unknown_0::Write4
            ((uchar *)puVar4[-0x343],*(int *)((long)puVar4 + -0x1a1c),*(__m128i *)(puVar4 + -0x346))
  ;
  puVar4[0xd27] = puVar4[0xd4e];
  puVar4[0xd25] = puVar4[0x1df9];
  puVar4[0xd26] = puVar4[0x1dfa];
  puVar4[-0x346] = 0x9098db;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x9098eb;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x9098ff;
  anon_unknown_0::Write4
            ((uchar *)puVar4[-0x343],*(int *)((long)puVar4 + -0x1a1c),*(__m128i *)(puVar4 + -0x346))
  ;
  puVar4[0xd2b] = puVar4[0xd4e];
  puVar4[0xd29] = puVar4[0x1df7];
  puVar4[0xd2a] = puVar4[0x1df8];
  puVar4[-0x346] = 0x90992b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x90993b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x90994f;
  anon_unknown_0::Write4
            ((uchar *)puVar4[-0x343],*(int *)((long)puVar4 + -0x1a1c),*(__m128i *)(puVar4 + -0x346))
  ;
  puVar4[0xd2f] = puVar4[0xd4e];
  puVar4[0xd2d] = puVar4[0x1df5];
  puVar4[0xd2e] = puVar4[0x1df6];
  puVar4[-0x346] = 0x90997b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x90998b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x90999f;
  anon_unknown_0::Write4
            ((uchar *)puVar4[-0x343],*(int *)((long)puVar4 + -0x1a1c),*(__m128i *)(puVar4 + -0x346))
  ;
  puVar4[0xd33] = puVar4[0xd4e];
  puVar4[0xd31] = puVar4[0x1df3];
  puVar4[0xd32] = puVar4[0x1df4];
  puVar4[-0x346] = 0x9099cb;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x9099db;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x9099ef;
  anon_unknown_0::Write4
            ((uchar *)puVar4[-0x343],*(int *)((long)puVar4 + -0x1a1c),*(__m128i *)(puVar4 + -0x346))
  ;
  puVar4[0xd37] = puVar4[0xd4e];
  puVar4[0xd35] = puVar4[0x1df1];
  puVar4[0xd36] = puVar4[0x1df2];
  puVar4[-0x346] = 0x909a1b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x909a2b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x909a3f;
  anon_unknown_0::Write4
            ((uchar *)puVar4[-0x343],*(int *)((long)puVar4 + -0x1a1c),*(__m128i *)(puVar4 + -0x346))
  ;
  puVar4[0xd3b] = puVar4[0xd4e];
  puVar4[0xd39] = puVar4[0x1def];
  puVar4[0xd3a] = puVar4[0x1df0];
  puVar4[-0x346] = 0x909a6b;
  anon_unknown_0::K(*(uint32_t *)(puVar4 + -0x343));
  puVar4[-0x346] = 0x909a7b;
  anon_unknown_0::Add(*(__m128i *)(puVar4 + -0x342),*(__m128i *)(puVar4 + -0x344));
  puVar4[-0x346] = 0x909a8f;
  anon_unknown_0::Write4
            ((uchar *)puVar4[-0x343],*(int *)((long)puVar4 + -0x1a1c),*(__m128i *)(puVar4 + -0x346))
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == puVar4[0x1dff]) {
    return;
  }
  puVar4[-0x346] = 0x909ab2;
  __stack_chk_fail();
}

Assistant:

void Transform_4way(unsigned char* out, const unsigned char* in)
{
    // Transform 1
    __m128i a = K(0x6a09e667ul);
    __m128i b = K(0xbb67ae85ul);
    __m128i c = K(0x3c6ef372ul);
    __m128i d = K(0xa54ff53aul);
    __m128i e = K(0x510e527ful);
    __m128i f = K(0x9b05688cul);
    __m128i g = K(0x1f83d9abul);
    __m128i h = K(0x5be0cd19ul);

    __m128i w0, w1, w2, w3, w4, w5, w6, w7, w8, w9, w10, w11, w12, w13, w14, w15;

    Round(a, b, c, d, e, f, g, h, Add(K(0x428a2f98ul), w0 = Read4(in, 0)));
    Round(h, a, b, c, d, e, f, g, Add(K(0x71374491ul), w1 = Read4(in, 4)));
    Round(g, h, a, b, c, d, e, f, Add(K(0xb5c0fbcful), w2 = Read4(in, 8)));
    Round(f, g, h, a, b, c, d, e, Add(K(0xe9b5dba5ul), w3 = Read4(in, 12)));
    Round(e, f, g, h, a, b, c, d, Add(K(0x3956c25bul), w4 = Read4(in, 16)));
    Round(d, e, f, g, h, a, b, c, Add(K(0x59f111f1ul), w5 = Read4(in, 20)));
    Round(c, d, e, f, g, h, a, b, Add(K(0x923f82a4ul), w6 = Read4(in, 24)));
    Round(b, c, d, e, f, g, h, a, Add(K(0xab1c5ed5ul), w7 = Read4(in, 28)));
    Round(a, b, c, d, e, f, g, h, Add(K(0xd807aa98ul), w8 = Read4(in, 32)));
    Round(h, a, b, c, d, e, f, g, Add(K(0x12835b01ul), w9 = Read4(in, 36)));
    Round(g, h, a, b, c, d, e, f, Add(K(0x243185beul), w10 = Read4(in, 40)));
    Round(f, g, h, a, b, c, d, e, Add(K(0x550c7dc3ul), w11 = Read4(in, 44)));
    Round(e, f, g, h, a, b, c, d, Add(K(0x72be5d74ul), w12 = Read4(in, 48)));
    Round(d, e, f, g, h, a, b, c, Add(K(0x80deb1feul), w13 = Read4(in, 52)));
    Round(c, d, e, f, g, h, a, b, Add(K(0x9bdc06a7ul), w14 = Read4(in, 56)));
    Round(b, c, d, e, f, g, h, a, Add(K(0xc19bf174ul), w15 = Read4(in, 60)));
    Round(a, b, c, d, e, f, g, h, Add(K(0xe49b69c1ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xefbe4786ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x0fc19dc6ul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x240ca1ccul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x2de92c6ful), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x4a7484aaul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x5cb0a9dcul), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x76f988daul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x983e5152ul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xa831c66dul), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0xb00327c8ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0xbf597fc7ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0xc6e00bf3ul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xd5a79147ul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x06ca6351ul), Inc(w14, sigma1(w12), w7, sigma0(w15))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x14292967ul), Inc(w15, sigma1(w13), w8, sigma0(w0))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x27b70a85ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x2e1b2138ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x4d2c6dfcul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x53380d13ul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x650a7354ul), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x766a0abbul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x81c2c92eul), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x92722c85ul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0xa2bfe8a1ul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xa81a664bul), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0xc24b8b70ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0xc76c51a3ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0xd192e819ul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xd6990624ul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0xf40e3585ul), Inc(w14, sigma1(w12), w7, sigma0(w15))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x106aa070ul), Inc(w15, sigma1(w13), w8, sigma0(w0))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x19a4c116ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x1e376c08ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x2748774cul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x34b0bcb5ul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x391c0cb3ul), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x4ed8aa4aul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x5b9cca4ful), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x682e6ff3ul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x748f82eeul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x78a5636ful), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x84c87814ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x8cc70208ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x90befffaul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xa4506cebul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0xbef9a3f7ul), Inc(w14, sigma1(w12), w7, sigma0(w15))));
    Round(b, c, d, e, f, g, h, a, Add(K(0xc67178f2ul), Inc(w15, sigma1(w13), w8, sigma0(w0))));

    a = Add(a, K(0x6a09e667ul));
    b = Add(b, K(0xbb67ae85ul));
    c = Add(c, K(0x3c6ef372ul));
    d = Add(d, K(0xa54ff53aul));
    e = Add(e, K(0x510e527ful));
    f = Add(f, K(0x9b05688cul));
    g = Add(g, K(0x1f83d9abul));
    h = Add(h, K(0x5be0cd19ul));

    __m128i t0 = a, t1 = b, t2 = c, t3 = d, t4 = e, t5 = f, t6 = g, t7 = h;

    // Transform 2
    Round(a, b, c, d, e, f, g, h, K(0xc28a2f98ul));
    Round(h, a, b, c, d, e, f, g, K(0x71374491ul));
    Round(g, h, a, b, c, d, e, f, K(0xb5c0fbcful));
    Round(f, g, h, a, b, c, d, e, K(0xe9b5dba5ul));
    Round(e, f, g, h, a, b, c, d, K(0x3956c25bul));
    Round(d, e, f, g, h, a, b, c, K(0x59f111f1ul));
    Round(c, d, e, f, g, h, a, b, K(0x923f82a4ul));
    Round(b, c, d, e, f, g, h, a, K(0xab1c5ed5ul));
    Round(a, b, c, d, e, f, g, h, K(0xd807aa98ul));
    Round(h, a, b, c, d, e, f, g, K(0x12835b01ul));
    Round(g, h, a, b, c, d, e, f, K(0x243185beul));
    Round(f, g, h, a, b, c, d, e, K(0x550c7dc3ul));
    Round(e, f, g, h, a, b, c, d, K(0x72be5d74ul));
    Round(d, e, f, g, h, a, b, c, K(0x80deb1feul));
    Round(c, d, e, f, g, h, a, b, K(0x9bdc06a7ul));
    Round(b, c, d, e, f, g, h, a, K(0xc19bf374ul));
    Round(a, b, c, d, e, f, g, h, K(0x649b69c1ul));
    Round(h, a, b, c, d, e, f, g, K(0xf0fe4786ul));
    Round(g, h, a, b, c, d, e, f, K(0x0fe1edc6ul));
    Round(f, g, h, a, b, c, d, e, K(0x240cf254ul));
    Round(e, f, g, h, a, b, c, d, K(0x4fe9346ful));
    Round(d, e, f, g, h, a, b, c, K(0x6cc984beul));
    Round(c, d, e, f, g, h, a, b, K(0x61b9411eul));
    Round(b, c, d, e, f, g, h, a, K(0x16f988faul));
    Round(a, b, c, d, e, f, g, h, K(0xf2c65152ul));
    Round(h, a, b, c, d, e, f, g, K(0xa88e5a6dul));
    Round(g, h, a, b, c, d, e, f, K(0xb019fc65ul));
    Round(f, g, h, a, b, c, d, e, K(0xb9d99ec7ul));
    Round(e, f, g, h, a, b, c, d, K(0x9a1231c3ul));
    Round(d, e, f, g, h, a, b, c, K(0xe70eeaa0ul));
    Round(c, d, e, f, g, h, a, b, K(0xfdb1232bul));
    Round(b, c, d, e, f, g, h, a, K(0xc7353eb0ul));
    Round(a, b, c, d, e, f, g, h, K(0x3069bad5ul));
    Round(h, a, b, c, d, e, f, g, K(0xcb976d5ful));
    Round(g, h, a, b, c, d, e, f, K(0x5a0f118ful));
    Round(f, g, h, a, b, c, d, e, K(0xdc1eeefdul));
    Round(e, f, g, h, a, b, c, d, K(0x0a35b689ul));
    Round(d, e, f, g, h, a, b, c, K(0xde0b7a04ul));
    Round(c, d, e, f, g, h, a, b, K(0x58f4ca9dul));
    Round(b, c, d, e, f, g, h, a, K(0xe15d5b16ul));
    Round(a, b, c, d, e, f, g, h, K(0x007f3e86ul));
    Round(h, a, b, c, d, e, f, g, K(0x37088980ul));
    Round(g, h, a, b, c, d, e, f, K(0xa507ea32ul));
    Round(f, g, h, a, b, c, d, e, K(0x6fab9537ul));
    Round(e, f, g, h, a, b, c, d, K(0x17406110ul));
    Round(d, e, f, g, h, a, b, c, K(0x0d8cd6f1ul));
    Round(c, d, e, f, g, h, a, b, K(0xcdaa3b6dul));
    Round(b, c, d, e, f, g, h, a, K(0xc0bbbe37ul));
    Round(a, b, c, d, e, f, g, h, K(0x83613bdaul));
    Round(h, a, b, c, d, e, f, g, K(0xdb48a363ul));
    Round(g, h, a, b, c, d, e, f, K(0x0b02e931ul));
    Round(f, g, h, a, b, c, d, e, K(0x6fd15ca7ul));
    Round(e, f, g, h, a, b, c, d, K(0x521afacaul));
    Round(d, e, f, g, h, a, b, c, K(0x31338431ul));
    Round(c, d, e, f, g, h, a, b, K(0x6ed41a95ul));
    Round(b, c, d, e, f, g, h, a, K(0x6d437890ul));
    Round(a, b, c, d, e, f, g, h, K(0xc39c91f2ul));
    Round(h, a, b, c, d, e, f, g, K(0x9eccabbdul));
    Round(g, h, a, b, c, d, e, f, K(0xb5c9a0e6ul));
    Round(f, g, h, a, b, c, d, e, K(0x532fb63cul));
    Round(e, f, g, h, a, b, c, d, K(0xd2c741c6ul));
    Round(d, e, f, g, h, a, b, c, K(0x07237ea3ul));
    Round(c, d, e, f, g, h, a, b, K(0xa4954b68ul));
    Round(b, c, d, e, f, g, h, a, K(0x4c191d76ul));

    w0 = Add(t0, a);
    w1 = Add(t1, b);
    w2 = Add(t2, c);
    w3 = Add(t3, d);
    w4 = Add(t4, e);
    w5 = Add(t5, f);
    w6 = Add(t6, g);
    w7 = Add(t7, h);

    // Transform 3
    a = K(0x6a09e667ul);
    b = K(0xbb67ae85ul);
    c = K(0x3c6ef372ul);
    d = K(0xa54ff53aul);
    e = K(0x510e527ful);
    f = K(0x9b05688cul);
    g = K(0x1f83d9abul);
    h = K(0x5be0cd19ul);

    Round(a, b, c, d, e, f, g, h, Add(K(0x428a2f98ul), w0));
    Round(h, a, b, c, d, e, f, g, Add(K(0x71374491ul), w1));
    Round(g, h, a, b, c, d, e, f, Add(K(0xb5c0fbcful), w2));
    Round(f, g, h, a, b, c, d, e, Add(K(0xe9b5dba5ul), w3));
    Round(e, f, g, h, a, b, c, d, Add(K(0x3956c25bul), w4));
    Round(d, e, f, g, h, a, b, c, Add(K(0x59f111f1ul), w5));
    Round(c, d, e, f, g, h, a, b, Add(K(0x923f82a4ul), w6));
    Round(b, c, d, e, f, g, h, a, Add(K(0xab1c5ed5ul), w7));
    Round(a, b, c, d, e, f, g, h, K(0x5807aa98ul));
    Round(h, a, b, c, d, e, f, g, K(0x12835b01ul));
    Round(g, h, a, b, c, d, e, f, K(0x243185beul));
    Round(f, g, h, a, b, c, d, e, K(0x550c7dc3ul));
    Round(e, f, g, h, a, b, c, d, K(0x72be5d74ul));
    Round(d, e, f, g, h, a, b, c, K(0x80deb1feul));
    Round(c, d, e, f, g, h, a, b, K(0x9bdc06a7ul));
    Round(b, c, d, e, f, g, h, a, K(0xc19bf274ul));
    Round(a, b, c, d, e, f, g, h, Add(K(0xe49b69c1ul), Inc(w0, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xefbe4786ul), Inc(w1, K(0xa00000ul), sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x0fc19dc6ul), Inc(w2, sigma1(w0), sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x240ca1ccul), Inc(w3, sigma1(w1), sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x2de92c6ful), Inc(w4, sigma1(w2), sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x4a7484aaul), Inc(w5, sigma1(w3), sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x5cb0a9dcul), Inc(w6, sigma1(w4), K(0x100ul), sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x76f988daul), Inc(w7, sigma1(w5), w0, K(0x11002000ul))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x983e5152ul), w8 = Add(K(0x80000000ul), sigma1(w6), w1)));
    Round(h, a, b, c, d, e, f, g, Add(K(0xa831c66dul), w9 = Add(sigma1(w7), w2)));
    Round(g, h, a, b, c, d, e, f, Add(K(0xb00327c8ul), w10 = Add(sigma1(w8), w3)));
    Round(f, g, h, a, b, c, d, e, Add(K(0xbf597fc7ul), w11 = Add(sigma1(w9), w4)));
    Round(e, f, g, h, a, b, c, d, Add(K(0xc6e00bf3ul), w12 = Add(sigma1(w10), w5)));
    Round(d, e, f, g, h, a, b, c, Add(K(0xd5a79147ul), w13 = Add(sigma1(w11), w6)));
    Round(c, d, e, f, g, h, a, b, Add(K(0x06ca6351ul), w14 = Add(sigma1(w12), w7, K(0x400022ul))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x14292967ul), w15 = Add(K(0x100ul), sigma1(w13), w8, sigma0(w0))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x27b70a85ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x2e1b2138ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x4d2c6dfcul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x53380d13ul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x650a7354ul), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x766a0abbul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x81c2c92eul), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x92722c85ul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0xa2bfe8a1ul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xa81a664bul), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0xc24b8b70ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0xc76c51a3ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0xd192e819ul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xd6990624ul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0xf40e3585ul), Inc(w14, sigma1(w12), w7, sigma0(w15))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x106aa070ul), Inc(w15, sigma1(w13), w8, sigma0(w0))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x19a4c116ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x1e376c08ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x2748774cul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x34b0bcb5ul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x391c0cb3ul), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x4ed8aa4aul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x5b9cca4ful), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x682e6ff3ul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x748f82eeul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x78a5636ful), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x84c87814ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x8cc70208ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x90befffaul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xa4506cebul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0xbef9a3f7ul), w14, sigma1(w12), w7, sigma0(w15)));
    Round(b, c, d, e, f, g, h, a, Add(K(0xc67178f2ul), w15, sigma1(w13), w8, sigma0(w0)));

    // Output
    Write4(out, 0, Add(a, K(0x6a09e667ul)));
    Write4(out, 4, Add(b, K(0xbb67ae85ul)));
    Write4(out, 8, Add(c, K(0x3c6ef372ul)));
    Write4(out, 12, Add(d, K(0xa54ff53aul)));
    Write4(out, 16, Add(e, K(0x510e527ful)));
    Write4(out, 20, Add(f, K(0x9b05688cul)));
    Write4(out, 24, Add(g, K(0x1f83d9abul)));
    Write4(out, 28, Add(h, K(0x5be0cd19ul)));
}